

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O1

void ncnn::binary_op_vector
               (float *ptr,float *ptr1,float *outptr,int aw,int bw,int ap,int bp,int op_type)

{
  int iVar1;
  int iVar7;
  float *pfVar9;
  float *pfVar10;
  undefined4 uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  byte bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  undefined8 uVar46;
  ulong uVar47;
  ushort uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [64];
  undefined1 auVar325 [64];
  undefined1 auVar326 [64];
  undefined1 auVar327 [64];
  undefined1 auVar328 [64];
  undefined1 auVar329 [64];
  undefined1 auVar330 [64];
  undefined1 auVar331 [64];
  undefined1 auVar332 [64];
  undefined1 auVar333 [64];
  undefined1 auVar334 [64];
  undefined1 auVar335 [64];
  undefined1 auVar336 [64];
  undefined1 auVar337 [64];
  undefined1 auVar338 [64];
  undefined1 auVar339 [64];
  undefined1 auVar340 [64];
  undefined1 auVar341 [64];
  undefined1 auVar342 [64];
  undefined1 auVar343 [64];
  undefined1 auVar344 [64];
  undefined1 auVar345 [64];
  undefined1 auVar346 [64];
  undefined1 auVar347 [64];
  undefined1 auVar348 [64];
  undefined1 auVar349 [64];
  undefined1 auVar350 [64];
  undefined1 auVar351 [64];
  undefined1 auVar352 [64];
  undefined1 auVar353 [64];
  undefined1 auVar354 [64];
  undefined1 auVar355 [64];
  undefined1 auVar356 [64];
  undefined1 auVar357 [64];
  undefined1 auVar358 [64];
  undefined1 auVar359 [64];
  undefined1 auVar360 [64];
  undefined1 auVar361 [64];
  undefined1 auVar362 [64];
  undefined1 auVar363 [64];
  undefined1 auVar364 [64];
  undefined1 auVar365 [64];
  undefined1 auVar366 [64];
  undefined1 auVar367 [64];
  undefined1 auVar368 [64];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar405;
  float fVar406;
  float afVar407 [16];
  float afVar408 [16];
  float afVar409 [16];
  float afVar410 [16];
  float afVar411 [16];
  float afVar412 [16];
  float afVar413 [16];
  float afVar414 [16];
  float afVar415 [16];
  float afVar416 [16];
  float afVar417 [16];
  float afVar418 [16];
  float afVar419 [16];
  float afVar420 [16];
  float afVar421 [16];
  float afVar422 [16];
  float afVar423 [16];
  int iVar424;
  uint uVar425;
  int iVar426;
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar555 [32];
  undefined1 auVar556 [32];
  undefined1 auVar558 [32];
  undefined1 auVar559 [32];
  uint uVar427;
  long lVar428;
  ulong uVar429;
  ulong uVar430;
  ulong uVar431;
  undefined1 auVar673 [32];
  undefined1 auVar675 [32];
  undefined1 auVar676 [32];
  undefined1 auVar677 [32];
  undefined1 auVar678 [32];
  undefined1 auVar679 [32];
  undefined1 auVar681 [32];
  undefined1 auVar682 [32];
  undefined1 auVar683 [32];
  undefined1 auVar684 [32];
  undefined1 auVar685 [32];
  undefined1 auVar686 [32];
  uint uVar883;
  uint uVar885;
  undefined1 auVar460 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar687 [32];
  undefined1 auVar688 [32];
  undefined1 auVar689 [32];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar690 [32];
  undefined1 auVar691 [32];
  undefined1 auVar692 [32];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar693 [32];
  undefined1 auVar694 [32];
  undefined1 auVar695 [32];
  undefined1 auVar696 [32];
  undefined1 auVar697 [32];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar698 [32];
  undefined1 auVar699 [32];
  undefined1 auVar700 [32];
  undefined1 auVar701 [32];
  undefined1 auVar702 [32];
  undefined1 auVar703 [32];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar704 [32];
  undefined1 auVar705 [32];
  undefined1 auVar706 [32];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar707 [32];
  undefined1 auVar708 [32];
  undefined1 auVar709 [32];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar710 [32];
  undefined1 auVar711 [32];
  undefined1 auVar712 [32];
  undefined1 auVar713 [32];
  undefined1 auVar714 [32];
  undefined1 auVar715 [32];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  uint uVar882;
  uint uVar884;
  uint uVar886;
  uint uVar887;
  uint uVar888;
  undefined1 in_ZmmResult [64];
  undefined1 auVar716 [64];
  undefined1 auVar717 [64];
  undefined1 auVar718 [64];
  undefined1 auVar719 [64];
  undefined1 auVar720 [64];
  undefined1 auVar721 [64];
  undefined1 auVar722 [64];
  undefined1 auVar723 [64];
  undefined1 auVar724 [64];
  undefined1 auVar725 [64];
  undefined1 auVar726 [64];
  undefined1 auVar727 [64];
  undefined1 auVar728 [64];
  undefined1 auVar729 [64];
  undefined1 auVar730 [64];
  undefined1 auVar731 [64];
  undefined1 auVar732 [64];
  undefined1 auVar733 [64];
  undefined1 auVar735 [64];
  undefined1 auVar736 [64];
  undefined1 auVar737 [64];
  undefined1 auVar560 [32];
  undefined1 auVar561 [32];
  undefined1 auVar562 [32];
  undefined1 auVar563 [32];
  undefined1 auVar564 [32];
  undefined1 auVar738 [64];
  undefined1 auVar739 [64];
  undefined1 auVar740 [64];
  undefined1 auVar741 [64];
  undefined1 auVar565 [32];
  undefined1 auVar566 [32];
  undefined1 auVar567 [32];
  undefined1 auVar568 [32];
  undefined1 auVar569 [32];
  undefined1 auVar570 [32];
  undefined1 auVar571 [32];
  undefined1 auVar572 [32];
  undefined1 auVar573 [32];
  undefined1 auVar742 [64];
  undefined1 auVar743 [64];
  undefined1 auVar744 [64];
  undefined1 auVar745 [64];
  undefined1 auVar574 [32];
  undefined1 auVar575 [32];
  undefined1 auVar576 [32];
  undefined1 auVar746 [64];
  undefined1 auVar747 [64];
  undefined1 auVar748 [64];
  undefined1 auVar577 [32];
  undefined1 auVar578 [32];
  undefined1 auVar579 [32];
  undefined1 auVar580 [32];
  undefined1 auVar581 [32];
  undefined1 auVar582 [32];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar749 [64];
  undefined1 auVar750 [64];
  undefined1 auVar751 [64];
  undefined1 auVar752 [64];
  undefined1 auVar753 [64];
  undefined1 auVar754 [64];
  undefined1 auVar583 [32];
  undefined1 auVar584 [32];
  undefined1 auVar585 [32];
  undefined1 auVar586 [32];
  undefined1 auVar587 [32];
  undefined1 auVar588 [32];
  undefined1 auVar755 [64];
  undefined1 auVar756 [64];
  undefined1 auVar757 [64];
  undefined1 auVar758 [64];
  undefined1 auVar589 [32];
  undefined1 auVar590 [32];
  undefined1 auVar591 [32];
  undefined1 auVar592 [32];
  undefined1 auVar593 [32];
  undefined1 auVar594 [32];
  undefined1 auVar759 [64];
  undefined1 auVar760 [64];
  undefined1 auVar761 [64];
  undefined1 auVar595 [32];
  undefined1 auVar596 [32];
  undefined1 auVar597 [32];
  undefined1 auVar598 [32];
  undefined1 auVar599 [32];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar762 [64];
  undefined1 auVar763 [64];
  undefined1 auVar764 [64];
  undefined1 auVar765 [64];
  undefined1 auVar766 [64];
  undefined1 auVar767 [64];
  undefined1 auVar768 [64];
  undefined1 auVar769 [64];
  undefined1 auVar770 [64];
  undefined1 auVar600 [32];
  undefined1 auVar601 [32];
  undefined1 auVar602 [32];
  undefined1 auVar771 [64];
  undefined1 auVar772 [64];
  undefined1 auVar773 [64];
  undefined1 auVar774 [64];
  undefined1 auVar603 [32];
  undefined1 auVar604 [32];
  undefined1 auVar605 [32];
  undefined1 auVar775 [64];
  undefined1 auVar776 [64];
  undefined1 auVar777 [64];
  undefined1 auVar778 [64];
  undefined1 auVar606 [32];
  undefined1 auVar607 [32];
  undefined1 auVar608 [32];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar779 [64];
  undefined1 auVar780 [64];
  undefined1 auVar781 [64];
  undefined1 auVar782 [64];
  undefined1 auVar783 [64];
  undefined1 auVar784 [64];
  undefined1 auVar785 [64];
  undefined1 auVar786 [64];
  undefined1 auVar609 [32];
  undefined1 auVar610 [32];
  undefined1 auVar611 [32];
  undefined1 auVar612 [32];
  undefined1 auVar787 [64];
  undefined1 auVar788 [64];
  undefined1 auVar789 [64];
  undefined1 auVar790 [64];
  undefined1 auVar613 [32];
  undefined1 auVar614 [32];
  undefined1 auVar615 [32];
  undefined1 auVar791 [64];
  undefined1 auVar792 [64];
  undefined1 auVar793 [64];
  undefined1 auVar794 [64];
  undefined1 auVar616 [32];
  undefined1 auVar617 [32];
  undefined1 auVar618 [32];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar795 [64];
  undefined1 auVar796 [64];
  undefined1 auVar797 [64];
  undefined1 auVar798 [64];
  undefined1 auVar799 [64];
  undefined1 auVar800 [64];
  undefined1 auVar619 [32];
  undefined1 auVar620 [32];
  undefined1 auVar621 [32];
  undefined1 auVar622 [32];
  undefined1 auVar623 [32];
  undefined1 auVar624 [32];
  undefined1 auVar801 [64];
  undefined1 auVar802 [64];
  undefined1 auVar803 [64];
  undefined1 auVar625 [32];
  undefined1 auVar626 [32];
  undefined1 auVar627 [32];
  undefined1 auVar628 [32];
  undefined1 auVar629 [32];
  undefined1 auVar630 [32];
  undefined1 auVar804 [64];
  undefined1 auVar805 [64];
  undefined1 auVar806 [64];
  undefined1 auVar807 [64];
  undefined1 auVar808 [64];
  undefined1 auVar631 [32];
  undefined1 auVar632 [32];
  undefined1 auVar633 [32];
  undefined1 auVar634 [32];
  undefined1 auVar635 [32];
  undefined1 auVar636 [32];
  undefined1 auVar809 [64];
  undefined1 auVar810 [64];
  undefined1 auVar811 [64];
  undefined1 auVar812 [64];
  undefined1 auVar813 [64];
  undefined1 auVar814 [64];
  undefined1 auVar815 [64];
  undefined1 auVar637 [32];
  undefined1 auVar638 [32];
  undefined1 auVar639 [32];
  undefined1 auVar640 [32];
  undefined1 auVar641 [32];
  undefined1 auVar642 [32];
  undefined1 auVar816 [64];
  undefined1 auVar817 [64];
  undefined1 auVar818 [64];
  undefined1 auVar643 [32];
  undefined1 auVar644 [32];
  undefined1 auVar645 [32];
  undefined1 auVar646 [32];
  undefined1 auVar647 [32];
  undefined1 auVar648 [32];
  undefined1 auVar819 [64];
  undefined1 auVar820 [64];
  undefined1 auVar821 [64];
  undefined1 auVar822 [64];
  undefined1 auVar823 [64];
  undefined1 auVar824 [64];
  undefined1 auVar649 [32];
  undefined1 auVar650 [32];
  undefined1 auVar651 [32];
  undefined1 auVar825 [64];
  undefined1 auVar826 [64];
  undefined1 auVar827 [64];
  undefined1 auVar652 [32];
  undefined1 auVar653 [32];
  undefined1 auVar654 [32];
  undefined1 auVar828 [64];
  undefined1 auVar829 [64];
  undefined1 auVar830 [64];
  undefined1 auVar831 [64];
  undefined1 auVar832 [64];
  undefined1 auVar833 [64];
  undefined1 auVar834 [64];
  undefined1 auVar835 [64];
  undefined1 auVar655 [32];
  undefined1 auVar656 [32];
  undefined1 auVar657 [32];
  undefined1 auVar658 [32];
  undefined1 auVar836 [64];
  undefined1 auVar837 [64];
  undefined1 auVar838 [64];
  undefined1 auVar839 [64];
  undefined1 auVar659 [32];
  undefined1 auVar660 [32];
  undefined1 auVar661 [32];
  undefined1 auVar840 [64];
  undefined1 auVar841 [64];
  undefined1 auVar842 [64];
  undefined1 auVar843 [64];
  undefined1 auVar844 [64];
  undefined1 auVar845 [64];
  undefined1 auVar846 [64];
  undefined1 auVar662 [32];
  undefined1 auVar663 [32];
  undefined1 auVar664 [32];
  undefined1 auVar665 [32];
  undefined1 auVar666 [32];
  undefined1 auVar847 [64];
  undefined1 auVar848 [64];
  undefined1 auVar849 [64];
  undefined1 auVar850 [64];
  undefined1 auVar667 [32];
  undefined1 auVar668 [32];
  undefined1 auVar669 [32];
  undefined1 auVar670 [32];
  undefined1 auVar671 [32];
  undefined1 auVar672 [32];
  undefined1 auVar852 [64];
  undefined1 auVar853 [64];
  undefined1 auVar854 [64];
  undefined1 auVar472 [16];
  uint uVar889;
  undefined1 auVar856 [64];
  undefined1 auVar857 [64];
  undefined1 auVar858 [64];
  undefined1 auVar859 [64];
  undefined1 auVar860 [64];
  undefined1 auVar861 [64];
  undefined1 auVar862 [64];
  undefined1 auVar863 [64];
  undefined1 auVar864 [64];
  undefined1 auVar865 [64];
  undefined1 auVar866 [64];
  undefined1 auVar867 [64];
  undefined1 auVar868 [64];
  undefined1 auVar869 [64];
  undefined1 auVar870 [64];
  undefined1 auVar871 [64];
  undefined1 auVar872 [64];
  undefined1 auVar873 [64];
  undefined1 auVar874 [64];
  undefined1 auVar875 [64];
  undefined1 auVar876 [64];
  undefined1 auVar877 [64];
  undefined1 auVar878 [64];
  undefined1 auVar879 [64];
  undefined1 auVar880 [64];
  float fVar890;
  float fVar891;
  __m128 magic_zero;
  undefined1 auVar892 [16];
  undefined1 auVar893 [16];
  undefined1 auVar894 [16];
  undefined1 auVar895 [16];
  undefined1 auVar896 [16];
  undefined1 auVar897 [16];
  undefined1 auVar898 [16];
  undefined1 auVar899 [16];
  undefined1 auVar900 [16];
  undefined1 auVar901 [16];
  undefined1 auVar902 [16];
  undefined1 auVar903 [16];
  undefined1 auVar904 [16];
  undefined1 auVar905 [16];
  undefined1 auVar906 [16];
  undefined1 auVar907 [16];
  undefined1 auVar908 [16];
  undefined1 auVar909 [16];
  undefined1 auVar910 [32];
  undefined1 auVar911 [32];
  undefined1 auVar912 [32];
  undefined1 auVar913 [32];
  undefined1 auVar914 [32];
  undefined1 auVar915 [32];
  undefined1 auVar916 [32];
  undefined1 auVar917 [32];
  undefined1 auVar918 [32];
  undefined1 auVar919 [32];
  undefined1 auVar920 [32];
  undefined1 auVar921 [32];
  undefined1 auVar922 [32];
  undefined1 auVar923 [32];
  undefined1 auVar924 [32];
  undefined1 auVar925 [32];
  undefined1 auVar926 [32];
  undefined1 auVar927 [32];
  undefined1 auVar928 [32];
  undefined1 auVar929 [32];
  undefined1 auVar930 [32];
  undefined1 auVar931 [32];
  undefined1 auVar932 [32];
  undefined1 auVar933 [32];
  undefined1 auVar934 [32];
  undefined1 in_ZMM0 [64];
  float fVar935;
  float fVar936;
  __m128 magic_zero_1;
  undefined1 auVar937 [16];
  undefined1 auVar938 [16];
  undefined1 auVar939 [16];
  undefined1 auVar940 [16];
  undefined1 auVar942 [16];
  undefined1 auVar943 [16];
  undefined1 auVar944 [16];
  undefined1 auVar945 [16];
  undefined1 auVar946 [16];
  undefined1 auVar947 [16];
  undefined1 auVar948 [16];
  undefined1 auVar949 [16];
  undefined1 auVar950 [16];
  undefined1 auVar951 [16];
  undefined1 auVar952 [16];
  undefined1 auVar953 [16];
  undefined1 auVar954 [16];
  undefined1 auVar955 [16];
  undefined1 auVar956 [16];
  undefined1 auVar957 [16];
  undefined1 auVar958 [16];
  undefined1 auVar959 [16];
  undefined1 auVar960 [16];
  undefined1 auVar961 [16];
  undefined1 auVar962 [16];
  undefined1 auVar963 [16];
  undefined1 auVar964 [16];
  undefined1 auVar965 [16];
  undefined1 auVar966 [16];
  undefined1 auVar967 [16];
  undefined1 auVar968 [16];
  undefined1 auVar969 [16];
  undefined1 auVar970 [16];
  undefined1 auVar971 [16];
  undefined1 auVar972 [16];
  undefined1 auVar973 [16];
  undefined1 auVar974 [16];
  undefined1 auVar975 [16];
  undefined1 auVar976 [16];
  undefined1 auVar977 [16];
  undefined1 auVar978 [16];
  undefined1 auVar979 [32];
  undefined1 auVar980 [32];
  undefined1 auVar981 [32];
  undefined1 auVar982 [32];
  undefined1 auVar983 [32];
  undefined1 auVar984 [32];
  undefined1 auVar985 [32];
  undefined1 auVar986 [32];
  undefined1 auVar987 [32];
  undefined1 auVar988 [32];
  undefined1 auVar989 [32];
  undefined1 auVar990 [32];
  undefined1 auVar991 [32];
  undefined1 auVar992 [32];
  undefined1 auVar993 [32];
  undefined1 auVar994 [32];
  undefined1 auVar995 [32];
  undefined1 auVar996 [32];
  undefined1 auVar997 [32];
  undefined1 auVar998 [32];
  undefined1 auVar999 [32];
  undefined1 auVar1000 [32];
  undefined1 auVar941 [16];
  undefined1 auVar1001 [32];
  undefined1 auVar1002 [32];
  undefined1 auVar1003 [32];
  undefined1 auVar1004 [32];
  undefined1 auVar1005 [32];
  undefined1 auVar1006 [32];
  undefined1 auVar1007 [32];
  undefined1 auVar1008 [32];
  undefined1 auVar1009 [32];
  undefined1 auVar1010 [32];
  undefined1 auVar1011 [32];
  undefined1 auVar1012 [32];
  undefined1 auVar1013 [32];
  undefined1 auVar1014 [32];
  undefined1 auVar1015 [32];
  undefined1 auVar1016 [32];
  undefined1 auVar1017 [32];
  undefined1 auVar1018 [32];
  undefined1 auVar1019 [32];
  undefined1 auVar1020 [32];
  undefined1 auVar1021 [32];
  undefined1 auVar1022 [32];
  undefined1 auVar1023 [32];
  undefined1 auVar1024 [32];
  undefined1 auVar1025 [32];
  undefined1 auVar1026 [32];
  undefined1 auVar1027 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar1028 [64];
  __m128 magic_zero_9;
  undefined1 auVar1059 [32];
  undefined1 auVar1060 [32];
  undefined1 auVar1061 [32];
  undefined1 auVar1029 [16];
  undefined1 auVar1062 [32];
  undefined1 auVar1030 [16];
  undefined1 auVar1063 [32];
  undefined1 auVar1064 [32];
  undefined1 auVar1065 [32];
  undefined1 auVar1066 [32];
  undefined1 auVar1067 [32];
  undefined1 auVar1068 [32];
  undefined1 auVar1069 [32];
  undefined1 auVar1070 [32];
  undefined1 auVar1031 [16];
  undefined1 auVar1071 [32];
  undefined1 auVar1072 [32];
  undefined1 auVar1073 [32];
  undefined1 auVar1074 [32];
  undefined1 auVar1075 [32];
  undefined1 auVar1076 [32];
  undefined1 auVar1077 [32];
  undefined1 auVar1078 [32];
  undefined1 auVar1079 [32];
  undefined1 auVar1080 [32];
  undefined1 auVar1081 [32];
  undefined1 auVar1082 [32];
  undefined1 auVar1083 [32];
  undefined1 auVar1084 [32];
  undefined1 auVar1032 [16];
  undefined1 auVar1033 [16];
  undefined1 auVar1085 [32];
  undefined1 auVar1086 [32];
  undefined1 auVar1087 [32];
  undefined1 auVar1088 [32];
  undefined1 auVar1089 [32];
  undefined1 auVar1090 [32];
  undefined1 auVar1091 [32];
  undefined1 auVar1092 [32];
  undefined1 auVar1034 [16];
  undefined1 auVar1035 [16];
  undefined1 auVar1036 [16];
  undefined1 auVar1037 [16];
  undefined1 auVar1038 [16];
  undefined1 auVar1039 [16];
  undefined1 auVar1040 [16];
  undefined1 auVar1041 [16];
  undefined1 auVar1042 [16];
  undefined1 auVar1043 [16];
  undefined1 auVar1044 [16];
  undefined1 auVar1045 [16];
  undefined1 auVar1046 [16];
  undefined1 auVar1093 [32];
  undefined1 auVar1094 [32];
  undefined1 auVar1095 [32];
  undefined1 auVar1047 [16];
  undefined1 auVar1096 [32];
  undefined1 auVar1097 [32];
  undefined1 auVar1098 [32];
  undefined1 auVar1048 [16];
  undefined1 auVar1049 [16];
  undefined1 auVar1050 [16];
  undefined1 auVar1051 [16];
  undefined1 auVar1052 [16];
  undefined1 auVar1053 [16];
  undefined1 auVar1054 [16];
  undefined1 auVar1055 [16];
  undefined1 auVar1099 [32];
  undefined1 auVar1100 [32];
  undefined1 auVar1101 [32];
  undefined1 auVar1102 [32];
  undefined1 auVar1103 [32];
  undefined1 auVar1104 [32];
  undefined1 auVar1105 [32];
  undefined1 auVar1106 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar1107 [64];
  undefined1 auVar1108 [64];
  undefined1 auVar1056 [32];
  undefined1 auVar1057 [32];
  undefined1 auVar1058 [32];
  undefined1 auVar1109 [64];
  undefined1 auVar1110 [64];
  __m128 magic_zero_10;
  undefined1 auVar1112 [16];
  undefined1 auVar1113 [16];
  undefined1 auVar1114 [16];
  undefined1 auVar1137 [32];
  undefined1 auVar1138 [32];
  undefined1 auVar1139 [32];
  undefined1 auVar1140 [32];
  undefined1 auVar1141 [32];
  undefined1 auVar1142 [32];
  undefined1 auVar1143 [32];
  undefined1 auVar1144 [32];
  undefined1 auVar1145 [32];
  undefined1 auVar1146 [32];
  undefined1 auVar1147 [32];
  undefined1 auVar1148 [32];
  undefined1 auVar1149 [32];
  undefined1 auVar1115 [16];
  undefined1 auVar1116 [16];
  undefined1 auVar1118 [16];
  undefined1 auVar1119 [16];
  undefined1 auVar1120 [16];
  undefined1 auVar1121 [16];
  undefined1 auVar1122 [16];
  undefined1 auVar1123 [16];
  undefined1 auVar1124 [16];
  undefined1 auVar1125 [16];
  undefined1 auVar1126 [16];
  undefined1 auVar1127 [16];
  undefined1 auVar1128 [16];
  undefined1 auVar1129 [16];
  undefined1 auVar1156 [32];
  undefined1 auVar1130 [16];
  undefined1 auVar1157 [32];
  undefined1 auVar1131 [16];
  undefined1 auVar1132 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar1158 [64];
  undefined1 auVar1159 [64];
  undefined1 auVar1133 [32];
  undefined1 auVar1134 [32];
  undefined1 auVar1135 [32];
  undefined1 auVar1111 [16];
  undefined1 auVar1136 [32];
  undefined1 auVar1160 [64];
  undefined1 auVar1150 [32];
  undefined1 auVar1117 [16];
  undefined1 auVar1161 [64];
  undefined1 auVar1151 [32];
  undefined1 auVar1152 [32];
  undefined1 auVar1153 [32];
  undefined1 auVar1154 [32];
  undefined1 auVar1155 [32];
  undefined1 auVar1162 [64];
  __m128 magic_zero_2;
  v4sf one;
  undefined1 auVar1168 [16];
  undefined1 auVar1169 [16];
  undefined1 auVar1170 [16];
  undefined1 auVar1171 [16];
  undefined1 auVar1172 [16];
  undefined1 auVar1173 [16];
  undefined1 auVar1174 [16];
  undefined1 auVar1175 [16];
  undefined1 auVar1176 [16];
  undefined1 auVar1177 [16];
  undefined1 auVar1178 [16];
  undefined1 auVar1182 [16];
  undefined1 auVar1183 [16];
  undefined1 auVar1184 [16];
  undefined1 auVar1185 [16];
  undefined1 auVar1186 [16];
  undefined1 auVar1187 [16];
  undefined1 auVar1188 [16];
  undefined1 auVar1189 [16];
  undefined1 auVar1190 [16];
  undefined1 auVar1191 [32];
  undefined1 auVar1192 [32];
  undefined1 auVar1193 [32];
  undefined1 auVar1194 [32];
  undefined1 auVar1195 [32];
  undefined1 auVar1196 [32];
  undefined1 auVar1163 [16];
  undefined1 auVar1197 [32];
  undefined1 auVar1198 [32];
  undefined1 auVar1199 [32];
  undefined1 auVar1164 [16];
  undefined1 auVar1200 [32];
  undefined1 auVar1201 [32];
  undefined1 auVar1211 [32];
  undefined1 auVar1212 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar1213 [64];
  undefined1 auVar1165 [16];
  undefined1 auVar1202 [32];
  undefined1 auVar1203 [32];
  undefined1 auVar1204 [32];
  undefined1 auVar1205 [32];
  undefined1 auVar1214 [64];
  undefined1 auVar1206 [32];
  undefined1 auVar1207 [32];
  undefined1 auVar1208 [32];
  undefined1 auVar1166 [16];
  undefined1 auVar1209 [32];
  undefined1 auVar1210 [32];
  undefined1 auVar1167 [16];
  undefined1 auVar1215 [64];
  undefined1 auVar1179 [16];
  undefined1 auVar1180 [16];
  undefined1 auVar1181 [16];
  undefined1 auVar1216 [64];
  undefined1 auVar1220 [16];
  undefined1 auVar1221 [16];
  undefined1 auVar1235 [16];
  undefined1 auVar1236 [16];
  undefined1 auVar1237 [16];
  undefined1 auVar1238 [16];
  undefined1 auVar1239 [16];
  undefined1 auVar1240 [16];
  undefined1 auVar1241 [16];
  undefined1 auVar1242 [16];
  undefined1 auVar1243 [16];
  undefined1 auVar1244 [16];
  undefined1 auVar1245 [16];
  undefined1 auVar1246 [32];
  undefined1 auVar1247 [32];
  undefined1 auVar1248 [32];
  undefined1 auVar1249 [32];
  undefined1 auVar1250 [32];
  undefined1 auVar1251 [32];
  undefined1 auVar1217 [16];
  undefined1 auVar1252 [32];
  undefined1 auVar1253 [32];
  undefined1 auVar1254 [32];
  undefined1 auVar1255 [32];
  undefined1 auVar1218 [16];
  undefined1 auVar1256 [32];
  undefined1 auVar1257 [32];
  undefined1 auVar1266 [32];
  undefined1 auVar1267 [32];
  undefined1 auVar1268 [32];
  undefined1 auVar1269 [32];
  undefined1 auVar1258 [32];
  undefined1 auVar1275 [32];
  undefined1 auVar1276 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar1277 [64];
  undefined1 auVar1219 [16];
  undefined1 auVar1259 [32];
  undefined1 auVar1260 [32];
  undefined1 auVar1261 [32];
  undefined1 auVar1262 [32];
  undefined1 auVar1263 [32];
  undefined1 auVar1264 [32];
  undefined1 auVar1265 [32];
  undefined1 auVar1278 [64];
  undefined1 auVar1270 [32];
  undefined1 auVar1271 [32];
  undefined1 auVar1272 [32];
  undefined1 auVar1273 [32];
  undefined1 auVar1274 [32];
  undefined1 auVar1222 [16];
  undefined1 auVar1279 [64];
  undefined1 auVar1223 [16];
  undefined1 auVar1224 [16];
  undefined1 auVar1225 [16];
  undefined1 auVar1226 [16];
  undefined1 auVar1227 [16];
  undefined1 auVar1228 [16];
  undefined1 auVar1229 [16];
  undefined1 auVar1230 [16];
  undefined1 auVar1231 [16];
  undefined1 auVar1232 [16];
  undefined1 auVar1233 [16];
  undefined1 auVar1234 [16];
  undefined1 auVar1280 [64];
  undefined1 auVar1327 [32];
  undefined1 auVar1328 [32];
  undefined1 auVar1329 [32];
  undefined1 auVar1330 [32];
  undefined1 auVar1331 [32];
  undefined1 auVar1332 [32];
  undefined1 auVar1333 [32];
  undefined1 auVar1284 [16];
  undefined1 auVar1334 [32];
  undefined1 auVar1285 [16];
  undefined1 auVar1286 [16];
  undefined1 auVar1335 [32];
  undefined1 auVar1287 [16];
  undefined1 auVar1288 [16];
  undefined1 auVar1336 [32];
  undefined1 auVar1337 [32];
  undefined1 auVar1289 [16];
  undefined1 auVar1290 [16];
  undefined1 auVar1291 [16];
  undefined1 auVar1292 [16];
  undefined1 auVar1293 [16];
  undefined1 auVar1294 [16];
  undefined1 auVar1295 [16];
  undefined1 auVar1296 [16];
  undefined1 auVar1297 [16];
  undefined1 auVar1338 [32];
  undefined1 auVar1339 [32];
  undefined1 auVar1298 [16];
  undefined1 auVar1299 [16];
  undefined1 auVar1340 [32];
  undefined1 auVar1300 [16];
  undefined1 auVar1301 [16];
  undefined1 auVar1341 [32];
  undefined1 auVar1302 [16];
  undefined1 auVar1342 [32];
  undefined1 auVar1303 [16];
  undefined1 auVar1304 [16];
  undefined1 auVar1305 [16];
  undefined1 auVar1306 [16];
  undefined1 auVar1307 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar1308 [32];
  undefined1 auVar1309 [32];
  undefined1 auVar1310 [32];
  undefined1 auVar1311 [32];
  undefined1 auVar1312 [32];
  undefined1 auVar1313 [32];
  undefined1 auVar1281 [16];
  undefined1 auVar1314 [32];
  undefined1 auVar1315 [32];
  undefined1 auVar1316 [32];
  undefined1 auVar1317 [32];
  undefined1 auVar1282 [16];
  undefined1 auVar1318 [32];
  undefined1 auVar1319 [32];
  undefined1 auVar1320 [32];
  undefined1 auVar1283 [16];
  undefined1 auVar1321 [32];
  undefined1 auVar1322 [32];
  undefined1 auVar1323 [32];
  undefined1 auVar1324 [32];
  undefined1 auVar1325 [32];
  undefined1 auVar1326 [32];
  undefined1 auVar1343 [64];
  v4sf one_1;
  undefined1 auVar1347 [16];
  undefined1 auVar1348 [16];
  undefined1 auVar1349 [16];
  undefined1 auVar1350 [16];
  undefined1 auVar1351 [16];
  undefined1 auVar1352 [16];
  undefined1 auVar1353 [16];
  undefined1 auVar1354 [16];
  undefined1 auVar1355 [16];
  undefined1 auVar1356 [16];
  undefined1 auVar1357 [16];
  undefined1 auVar1358 [16];
  undefined1 auVar1359 [16];
  undefined1 auVar1360 [16];
  undefined1 auVar1361 [16];
  undefined1 auVar1362 [16];
  undefined1 auVar1363 [16];
  undefined1 auVar1364 [16];
  undefined1 auVar1365 [16];
  undefined1 auVar1366 [16];
  undefined1 auVar1367 [32];
  undefined1 auVar1368 [32];
  undefined1 auVar1369 [32];
  undefined1 auVar1370 [32];
  undefined1 auVar1371 [32];
  undefined1 auVar1372 [32];
  undefined1 auVar1344 [16];
  undefined1 auVar1373 [32];
  undefined1 auVar1374 [32];
  undefined1 auVar1375 [32];
  undefined1 auVar1345 [16];
  undefined1 auVar1376 [32];
  undefined1 auVar1377 [32];
  undefined1 auVar1378 [32];
  undefined1 auVar1346 [16];
  undefined1 auVar1379 [32];
  undefined1 auVar1380 [32];
  undefined1 auVar1381 [32];
  undefined1 auVar1382 [32];
  undefined1 auVar1383 [32];
  undefined1 auVar1384 [32];
  undefined1 auVar1385 [32];
  undefined1 auVar1386 [32];
  undefined1 auVar1387 [32];
  undefined1 auVar1388 [32];
  undefined1 auVar1389 [32];
  undefined1 auVar1390 [32];
  undefined1 auVar1391 [32];
  undefined1 auVar1392 [32];
  undefined1 auVar1393 [32];
  undefined1 auVar1394 [32];
  undefined1 auVar1395 [32];
  undefined1 auVar1396 [32];
  undefined1 auVar1397 [32];
  undefined1 auVar1398 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar1399 [64];
  undefined1 auVar1400 [16];
  undefined1 auVar1401 [16];
  undefined1 auVar1402 [16];
  undefined1 auVar1403 [16];
  undefined1 auVar1404 [16];
  undefined1 auVar1405 [16];
  undefined1 auVar1406 [16];
  undefined1 auVar1407 [16];
  undefined1 auVar1408 [16];
  undefined1 auVar1409 [16];
  undefined1 auVar1410 [16];
  undefined1 auVar1411 [16];
  undefined1 auVar1412 [16];
  undefined1 auVar1413 [16];
  undefined1 auVar1414 [16];
  undefined1 auVar1415 [16];
  undefined1 auVar1416 [16];
  undefined1 auVar1417 [16];
  undefined1 auVar1418 [16];
  undefined1 auVar1419 [16];
  undefined1 auVar1420 [16];
  undefined1 auVar1421 [16];
  undefined1 auVar1422 [16];
  undefined1 auVar1423 [32];
  undefined1 auVar1424 [32];
  undefined1 auVar1425 [32];
  undefined1 auVar1426 [32];
  undefined1 auVar1427 [32];
  undefined1 auVar1428 [32];
  undefined1 auVar1429 [32];
  undefined1 auVar1430 [32];
  undefined1 auVar1431 [32];
  undefined1 auVar1432 [32];
  undefined1 auVar1433 [32];
  undefined1 auVar1434 [32];
  undefined1 auVar1435 [32];
  undefined1 auVar1436 [32];
  undefined1 auVar1437 [32];
  undefined1 auVar1438 [32];
  undefined1 auVar1439 [32];
  undefined1 auVar1440 [32];
  undefined1 auVar1441 [32];
  undefined1 auVar1442 [32];
  undefined1 auVar1443 [32];
  undefined1 auVar1444 [32];
  undefined1 auVar1445 [32];
  undefined1 auVar1446 [32];
  undefined1 auVar1447 [32];
  undefined1 auVar1448 [32];
  undefined1 auVar1449 [32];
  undefined1 auVar1450 [32];
  undefined1 auVar1451 [32];
  undefined1 auVar1452 [32];
  undefined1 auVar1453 [32];
  undefined1 auVar1454 [16];
  undefined1 auVar1455 [16];
  undefined1 auVar1456 [16];
  undefined1 auVar1457 [16];
  undefined1 auVar1458 [16];
  undefined1 auVar1459 [16];
  undefined1 auVar1460 [16];
  undefined1 auVar1461 [16];
  undefined1 auVar1462 [16];
  undefined1 auVar1463 [16];
  undefined1 auVar1464 [16];
  undefined1 auVar1465 [16];
  undefined1 auVar1466 [16];
  undefined1 auVar1467 [16];
  undefined1 auVar1468 [16];
  undefined1 auVar1469 [16];
  undefined1 auVar1470 [16];
  undefined1 auVar1471 [16];
  undefined1 auVar1472 [16];
  undefined1 auVar1473 [16];
  undefined1 auVar1474 [16];
  undefined1 auVar1475 [16];
  undefined1 auVar1476 [16];
  undefined1 auVar1477 [32];
  undefined1 auVar1478 [32];
  undefined1 auVar1479 [32];
  undefined1 auVar1480 [32];
  undefined1 auVar1481 [32];
  undefined1 auVar1482 [32];
  undefined1 auVar1483 [32];
  undefined1 auVar1484 [32];
  undefined1 auVar1485 [32];
  undefined1 auVar1486 [32];
  undefined1 auVar1487 [32];
  undefined1 auVar1488 [32];
  undefined1 auVar1489 [32];
  undefined1 auVar1490 [32];
  undefined1 auVar1491 [32];
  undefined1 auVar1492 [32];
  undefined1 auVar1493 [32];
  undefined1 auVar1494 [32];
  undefined1 auVar1495 [32];
  undefined1 auVar1496 [32];
  undefined1 auVar1497 [32];
  undefined1 auVar1498 [32];
  undefined1 auVar1499 [32];
  undefined1 auVar1500 [32];
  undefined1 auVar1501 [32];
  undefined1 auVar1502 [32];
  undefined1 auVar1503 [32];
  undefined1 auVar1504 [32];
  undefined1 auVar1505 [32];
  undefined1 auVar1506 [32];
  undefined1 auVar1507 [32];
  undefined1 auVar1508 [16];
  undefined1 auVar1509 [16];
  undefined1 auVar1510 [16];
  undefined1 auVar1511 [16];
  undefined1 auVar1512 [16];
  undefined1 auVar1513 [16];
  undefined1 auVar1514 [16];
  undefined1 auVar1515 [16];
  undefined1 auVar1516 [16];
  undefined1 auVar1517 [16];
  undefined1 auVar1518 [16];
  undefined1 auVar1519 [16];
  undefined1 auVar1520 [16];
  undefined1 auVar1521 [16];
  undefined1 auVar1522 [16];
  undefined1 auVar1523 [16];
  undefined1 auVar1524 [16];
  undefined1 auVar1525 [16];
  undefined1 auVar1526 [16];
  undefined1 auVar1527 [16];
  undefined1 auVar1528 [16];
  undefined1 auVar1529 [16];
  undefined1 auVar1530 [16];
  undefined1 auVar1531 [32];
  undefined1 auVar1532 [32];
  undefined1 auVar1533 [32];
  undefined1 auVar1534 [32];
  undefined1 auVar1535 [32];
  undefined1 auVar1536 [32];
  undefined1 auVar1537 [32];
  undefined1 auVar1538 [32];
  undefined1 auVar1539 [32];
  undefined1 auVar1540 [32];
  undefined1 auVar1541 [32];
  undefined1 auVar1542 [32];
  undefined1 auVar1543 [32];
  undefined1 auVar1544 [32];
  undefined1 auVar1545 [32];
  undefined1 auVar1546 [32];
  undefined1 auVar1547 [32];
  undefined1 auVar1548 [32];
  undefined1 auVar1549 [32];
  undefined1 auVar1550 [32];
  undefined1 auVar1551 [32];
  undefined1 auVar1552 [32];
  undefined1 auVar1553 [32];
  undefined1 auVar1554 [32];
  undefined1 auVar1555 [32];
  undefined1 auVar1556 [32];
  undefined1 auVar1557 [32];
  undefined1 auVar1558 [32];
  undefined1 auVar1559 [32];
  undefined1 auVar1560 [32];
  undefined1 auVar1561 [32];
  undefined1 auVar1562 [16];
  undefined1 auVar1563 [16];
  undefined1 auVar1564 [16];
  undefined1 auVar1565 [16];
  undefined1 auVar1566 [16];
  undefined1 auVar1567 [16];
  undefined1 auVar1568 [16];
  undefined1 auVar1569 [16];
  undefined1 auVar1570 [16];
  undefined1 auVar1571 [16];
  undefined1 auVar1572 [16];
  undefined1 auVar1573 [16];
  undefined1 auVar1574 [16];
  undefined1 auVar1575 [16];
  undefined1 auVar1576 [16];
  undefined1 auVar1577 [16];
  undefined1 auVar1578 [16];
  undefined1 auVar1579 [16];
  undefined1 auVar1580 [16];
  undefined1 auVar1581 [16];
  undefined1 auVar1582 [16];
  undefined1 auVar1583 [16];
  undefined1 auVar1584 [16];
  undefined1 auVar1585 [32];
  undefined1 auVar1586 [32];
  undefined1 auVar1587 [32];
  undefined1 auVar1588 [32];
  undefined1 auVar1589 [32];
  undefined1 auVar1590 [32];
  undefined1 auVar1591 [32];
  undefined1 auVar1592 [32];
  undefined1 auVar1593 [32];
  undefined1 auVar1594 [32];
  undefined1 auVar1595 [32];
  undefined1 auVar1596 [32];
  undefined1 auVar1597 [32];
  undefined1 auVar1598 [32];
  undefined1 auVar1599 [32];
  undefined1 auVar1600 [32];
  undefined1 auVar1601 [32];
  undefined1 auVar1602 [32];
  undefined1 auVar1603 [32];
  undefined1 auVar1604 [32];
  undefined1 auVar1605 [32];
  undefined1 auVar1606 [32];
  undefined1 auVar1607 [32];
  undefined1 auVar1608 [32];
  undefined1 auVar1609 [32];
  undefined1 auVar1610 [32];
  undefined1 auVar1611 [32];
  undefined1 auVar1612 [32];
  undefined1 auVar1613 [32];
  undefined1 auVar1614 [32];
  undefined1 auVar1615 [32];
  undefined1 auVar1616 [16];
  undefined1 auVar1617 [16];
  undefined1 auVar1618 [16];
  undefined1 auVar1619 [16];
  undefined1 auVar1620 [16];
  undefined1 auVar1621 [16];
  undefined1 auVar1622 [16];
  undefined1 auVar1623 [16];
  undefined1 auVar1624 [16];
  undefined1 auVar1625 [16];
  undefined1 auVar1626 [16];
  undefined1 auVar1627 [16];
  undefined1 auVar1628 [16];
  undefined1 auVar1629 [16];
  undefined1 auVar1630 [16];
  undefined1 auVar1631 [16];
  undefined1 auVar1632 [16];
  undefined1 auVar1633 [16];
  undefined1 auVar1634 [16];
  undefined1 auVar1635 [16];
  undefined1 auVar1636 [16];
  undefined1 auVar1637 [16];
  undefined1 auVar1638 [16];
  undefined1 auVar1639 [32];
  undefined1 auVar1640 [32];
  undefined1 auVar1641 [32];
  undefined1 auVar1642 [32];
  undefined1 auVar1643 [32];
  undefined1 auVar1644 [32];
  undefined1 auVar1645 [32];
  undefined1 auVar1646 [32];
  undefined1 auVar1647 [32];
  undefined1 auVar1648 [32];
  undefined1 auVar1649 [32];
  undefined1 auVar1650 [32];
  undefined1 auVar1651 [32];
  undefined1 auVar1652 [32];
  undefined1 auVar1653 [32];
  undefined1 auVar1654 [32];
  undefined1 auVar1655 [32];
  undefined1 auVar1656 [32];
  undefined1 auVar1657 [32];
  undefined1 auVar1658 [32];
  undefined1 auVar1659 [32];
  undefined1 auVar1660 [32];
  undefined1 auVar1661 [32];
  undefined1 auVar1662 [32];
  undefined1 auVar1663 [32];
  undefined1 auVar1664 [32];
  undefined1 auVar1665 [32];
  undefined1 auVar1666 [32];
  undefined1 auVar1667 [32];
  undefined1 auVar1668 [32];
  undefined1 auVar1669 [32];
  undefined1 auVar1670 [16];
  undefined1 auVar1671 [16];
  undefined1 auVar1672 [16];
  undefined1 auVar1673 [16];
  undefined1 auVar1674 [16];
  undefined1 auVar1675 [16];
  undefined1 auVar1676 [16];
  undefined1 auVar1677 [16];
  undefined1 auVar1678 [16];
  undefined1 auVar1679 [16];
  undefined1 auVar1680 [16];
  undefined1 auVar1681 [16];
  undefined1 auVar1682 [16];
  undefined1 auVar1683 [16];
  undefined1 auVar1684 [16];
  undefined1 auVar1685 [16];
  undefined1 auVar1686 [16];
  undefined1 auVar1687 [16];
  undefined1 auVar1688 [16];
  undefined1 auVar1689 [16];
  undefined1 auVar1690 [16];
  undefined1 auVar1691 [16];
  undefined1 auVar1692 [16];
  undefined1 auVar1693 [32];
  undefined1 auVar1694 [32];
  undefined1 auVar1695 [32];
  undefined1 auVar1696 [32];
  undefined1 auVar1697 [32];
  undefined1 auVar1698 [32];
  undefined1 auVar1699 [32];
  undefined1 auVar1700 [32];
  undefined1 auVar1701 [32];
  undefined1 auVar1702 [32];
  undefined1 auVar1703 [32];
  undefined1 auVar1704 [32];
  undefined1 auVar1705 [32];
  undefined1 auVar1706 [32];
  undefined1 auVar1707 [32];
  undefined1 auVar1708 [32];
  undefined1 auVar1709 [32];
  undefined1 auVar1710 [32];
  undefined1 auVar1711 [32];
  undefined1 auVar1712 [32];
  undefined1 auVar1713 [32];
  undefined1 auVar1714 [32];
  undefined1 auVar1715 [32];
  undefined1 auVar1716 [32];
  undefined1 auVar1717 [32];
  undefined1 auVar1718 [32];
  undefined1 auVar1719 [32];
  undefined1 auVar1720 [32];
  undefined1 auVar1721 [32];
  undefined1 auVar1722 [32];
  undefined1 auVar1723 [32];
  undefined1 auVar1725 [16];
  undefined1 auVar1726 [16];
  undefined1 auVar1727 [16];
  undefined1 auVar1728 [16];
  undefined1 auVar1729 [16];
  undefined1 auVar1730 [16];
  undefined1 auVar1731 [16];
  undefined1 auVar1732 [16];
  undefined1 auVar1733 [16];
  undefined1 auVar1734 [16];
  undefined1 auVar1735 [16];
  undefined1 auVar1736 [16];
  undefined1 auVar1737 [16];
  undefined1 auVar1738 [16];
  undefined1 auVar1739 [16];
  undefined1 auVar1740 [16];
  undefined1 auVar1741 [16];
  undefined1 auVar1746 [32];
  undefined1 auVar1753 [32];
  undefined1 auVar1754 [32];
  undefined1 auVar1755 [32];
  undefined1 auVar1756 [32];
  undefined1 auVar1757 [32];
  undefined1 auVar1758 [32];
  undefined1 auVar1759 [32];
  undefined1 auVar1760 [32];
  undefined1 auVar1761 [32];
  undefined1 auVar1762 [32];
  undefined1 auVar1763 [32];
  undefined1 auVar1764 [32];
  undefined1 auVar1765 [32];
  undefined1 auVar1766 [32];
  undefined1 auVar1767 [32];
  undefined1 auVar1768 [32];
  undefined1 auVar1769 [32];
  undefined1 auVar1770 [32];
  undefined1 auVar1771 [32];
  undefined1 auVar1772 [32];
  undefined1 auVar1773 [32];
  undefined1 auVar1742 [16];
  undefined1 auVar1743 [16];
  undefined1 auVar1744 [16];
  undefined1 auVar1745 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar1774 [64];
  undefined1 auVar1747 [32];
  undefined1 auVar1748 [32];
  undefined1 auVar1749 [32];
  undefined1 auVar1750 [32];
  undefined1 auVar1724 [16];
  undefined1 auVar1751 [32];
  undefined1 auVar1752 [32];
  undefined1 auVar1775 [64];
  undefined1 auVar1780 [16];
  undefined1 auVar1781 [16];
  undefined1 auVar1782 [16];
  undefined1 auVar1783 [16];
  undefined1 auVar1784 [16];
  undefined1 auVar1785 [16];
  undefined1 auVar1792 [16];
  undefined1 auVar1793 [16];
  undefined1 auVar1794 [16];
  undefined1 auVar1795 [16];
  undefined1 auVar1796 [32];
  undefined1 auVar1797 [32];
  undefined1 auVar1798 [32];
  undefined1 auVar1799 [32];
  undefined1 auVar1800 [32];
  undefined1 auVar1801 [32];
  undefined1 auVar1776 [16];
  undefined1 auVar1802 [32];
  undefined1 auVar1803 [32];
  undefined1 auVar1777 [16];
  undefined1 auVar1804 [32];
  undefined1 auVar1805 [32];
  undefined1 auVar1806 [32];
  undefined1 auVar1778 [16];
  undefined1 auVar1807 [32];
  undefined1 auVar1808 [32];
  undefined1 auVar1809 [32];
  undefined1 auVar1810 [32];
  undefined1 auVar1811 [32];
  undefined1 auVar1812 [32];
  undefined1 auVar1813 [32];
  undefined1 auVar1814 [32];
  undefined1 auVar1815 [32];
  undefined1 auVar1816 [32];
  undefined1 auVar1779 [16];
  undefined1 auVar1821 [32];
  float in_ZMM15 [16];
  undefined1 auVar1822 [64];
  undefined1 auVar1817 [32];
  undefined1 auVar1818 [32];
  undefined1 auVar1786 [16];
  undefined1 auVar1787 [16];
  undefined1 auVar1788 [16];
  undefined1 auVar1789 [16];
  undefined1 auVar1819 [32];
  undefined1 auVar1790 [16];
  undefined1 auVar1820 [32];
  undefined1 auVar1791 [16];
  undefined1 auVar1823 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM28 [64];
  undefined1 in_ZMM29 [64];
  undefined1 in_ZMM30 [64];
  undefined1 in_ZMM31 [64];
  float local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar8;
  undefined1 auVar557 [32];
  undefined1 auVar435 [16];
  undefined1 auVar461 [16];
  undefined1 auVar466 [16];
  undefined1 auVar851 [64];
  undefined1 auVar855 [64];
  undefined1 auVar674 [32];
  undefined1 auVar680 [32];
  undefined1 auVar881 [64];
  undefined1 auVar734 [64];
  
  afVar423 = _ps512_cephes_log_p8;
  afVar422 = _ps512_cephes_log_p7;
  afVar421 = _ps512_cephes_log_p6;
  afVar420 = _ps512_cephes_log_p5;
  afVar419 = _ps512_cephes_log_p4;
  afVar418 = _ps512_cephes_log_p3;
  afVar417 = _ps512_cephes_log_p2;
  afVar416 = _ps512_cephes_log_p1;
  afVar415 = ::_ps512_cephes_exp_p4;
  afVar414 = ::_ps512_cephes_exp_p3;
  afVar413 = ::_ps512_cephes_exp_p2;
  afVar412 = ::_ps512_cephes_exp_p1;
  afVar411 = ::_ps512_cephes_exp_p0;
  afVar410 = ::_ps512_cephes_LOG2EF;
  afVar409 = ::_ps512_exp_lo;
  afVar408 = ::_ps512_exp_hi;
  afVar407 = ::_ps512_1;
  auVar679 = in_ZMM2._0_32_;
  auVar465 = in_ZMM21._0_16_;
  auVar562 = in_ZmmResult._0_32_;
  auVar464 = in_ZMM29._0_16_;
  auVar460 = in_ZMM20._0_16_;
  auVar472 = in_ZMM28._0_16_;
  auVar674 = in_ZMM0._0_32_;
  auVar442 = in_ZMM19._0_16_;
  auVar466 = in_ZMM31._0_16_;
  auVar734._32_32_ = in_ZMM1._32_32_;
  auVar678 = ::_ps512_1._0_32_;
  auVar519 = ::_ps512_exp_lo._0_16_;
  auVar677 = ::_ps512_cephes_LOG2EF._0_32_;
  auVar461 = ::_ps512_exp_hi._0_16_;
  switch(op_type) {
  case 0:
    uVar425 = bw;
    if (bw < aw) {
      uVar425 = aw;
    }
    iVar424 = bp;
    if (bp < ap) {
      iVar424 = ap;
    }
    uVar427 = iVar424 * uVar425;
    if (ap == bp) {
      if (aw == bw) {
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar734 = vaddps_avx512f(*(undefined1 (*) [64])ptr1,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar734;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          fVar890 = *(float *)(*(undefined1 (*) [64])ptr1 + 4);
          fVar891 = *(float *)(*(undefined1 (*) [64])ptr1 + 8);
          fVar397 = *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
          fVar936 = *(float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          fVar398 = *(float *)(*(undefined1 (*) [64])ptr1 + 0x14);
          fVar399 = *(float *)(*(undefined1 (*) [64])ptr1 + 0x18);
          fVar935 = *(float *)(*(undefined1 (*) [64])ptr1 + 0x1c);
          fVar400 = *(float *)(*(undefined1 (*) [64])ptr + 4);
          fVar401 = *(float *)(*(undefined1 (*) [64])ptr + 8);
          fVar402 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          fVar403 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          fVar404 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          fVar405 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          fVar406 = *(float *)(*(undefined1 (*) [64])ptr + 0x1c);
          *(float *)*(undefined1 (*) [64])outptr =
               *(float *)*(undefined1 (*) [64])ptr1 + *(float *)*(undefined1 (*) [64])ptr;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar890 + fVar400;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar891 + fVar401;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar397 + fVar402;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar936 + fVar403;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar398 + fVar404;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar399 + fVar405;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar935 + fVar406;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          fVar890 = *(float *)(*(undefined1 (*) [64])ptr1 + 4);
          fVar891 = *(float *)(*(undefined1 (*) [64])ptr1 + 8);
          fVar397 = *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
          fVar936 = *(float *)(*(undefined1 (*) [64])ptr + 4);
          fVar398 = *(float *)(*(undefined1 (*) [64])ptr + 8);
          fVar399 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          *(float *)*(undefined1 (*) [64])outptr =
               *(float *)*(undefined1 (*) [64])ptr1 + *(float *)*(undefined1 (*) [64])ptr;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar890 + fVar936;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar891 + fVar398;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar397 + fVar399;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               *(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4) +
               *(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (bw == 1) {
        fVar890 = *ptr1;
        if (iVar424 == 4) {
          auVar947 = *(undefined1 (*) [16])ptr1;
        }
        else {
          auVar947._4_4_ = fVar890;
          auVar947._0_4_ = fVar890;
          auVar947._8_4_ = fVar890;
          auVar947._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1088 = *(undefined1 (*) [32])ptr1;
        }
        else {
          auVar1088._16_16_ = auVar947;
          auVar1088._0_16_ = auVar947;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr1;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1088),auVar1088,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar716 = vaddps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          fVar891 = *(float *)(*(undefined1 (*) [64])ptr + 4);
          fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 8);
          fVar936 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          fVar398 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          fVar399 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          fVar935 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          fVar400 = *(float *)(*(undefined1 (*) [64])ptr + 0x1c);
          *(float *)*(undefined1 (*) [64])outptr =
               auVar1088._0_4_ + *(float *)*(undefined1 (*) [64])ptr;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar1088._4_4_ + fVar891;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar1088._8_4_ + fVar397;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar1088._12_4_ + fVar936;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = auVar1088._16_4_ + fVar398;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = auVar1088._20_4_ + fVar399;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar1088._24_4_ + fVar935;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = auVar1088._28_4_ + fVar400;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          fVar891 = *(float *)(*(undefined1 (*) [64])ptr + 4);
          fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 8);
          fVar936 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          *(float *)*(undefined1 (*) [64])outptr =
               auVar947._0_4_ + *(float *)*(undefined1 (*) [64])ptr;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar947._4_4_ + fVar891;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar947._8_4_ + fVar397;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar947._12_4_ + fVar936;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               fVar890 + *(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (aw == 1) {
        fVar890 = *ptr;
        if (iVar424 == 4) {
          auVar970 = *(undefined1 (*) [16])ptr;
        }
        else {
          auVar970._4_4_ = fVar890;
          auVar970._0_4_ = fVar890;
          auVar970._8_4_ = fVar890;
          auVar970._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1102 = *(undefined1 (*) [32])ptr;
        }
        else {
          auVar1102._16_16_ = auVar970;
          auVar1102._0_16_ = auVar970;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1102),auVar1102,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar716 = vaddps_avx512f(auVar734,*(undefined1 (*) [64])ptr1);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          fVar891 = *(float *)(*(undefined1 (*) [64])ptr1 + 4);
          fVar397 = *(float *)(*(undefined1 (*) [64])ptr1 + 8);
          fVar936 = *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
          fVar398 = *(float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          fVar399 = *(float *)(*(undefined1 (*) [64])ptr1 + 0x14);
          fVar935 = *(float *)(*(undefined1 (*) [64])ptr1 + 0x18);
          fVar400 = *(float *)(*(undefined1 (*) [64])ptr1 + 0x1c);
          *(float *)*(undefined1 (*) [64])outptr =
               auVar1102._0_4_ + *(float *)*(undefined1 (*) [64])ptr1;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar1102._4_4_ + fVar891;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar1102._8_4_ + fVar397;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar1102._12_4_ + fVar936;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = auVar1102._16_4_ + fVar398;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = auVar1102._20_4_ + fVar399;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar1102._24_4_ + fVar935;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = auVar1102._28_4_ + fVar400;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          fVar891 = *(float *)(*(undefined1 (*) [64])ptr1 + 4);
          fVar397 = *(float *)(*(undefined1 (*) [64])ptr1 + 8);
          fVar936 = *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
          *(float *)*(undefined1 (*) [64])outptr =
               auVar970._0_4_ + *(float *)*(undefined1 (*) [64])ptr1;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar970._4_4_ + fVar891;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar970._8_4_ + fVar397;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar970._12_4_ + fVar936;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               fVar890 + *(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4);
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
    }
    if (bp == 1) {
      if (aw == bw) {
        uVar427 = uVar425;
        if (0 < (int)uVar425 && iVar424 == 0x10) {
          do {
            auVar734 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
            auVar734 = vaddps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar734;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
            uVar427 = uVar427 - 1;
          } while (uVar427 != 0);
        }
        if (iVar424 == 8) {
          uVar427 = 0;
          if (1 < (int)uVar425) {
            iVar426 = 1;
            do {
              fVar890 = *ptr1;
              fVar891 = ptr1[1];
              auVar995._4_4_ = fVar891;
              auVar995._0_4_ = fVar891;
              auVar995._8_4_ = fVar891;
              auVar995._12_4_ = fVar891;
              auVar995._16_4_ = fVar891;
              auVar995._20_4_ = fVar891;
              auVar995._24_4_ = fVar891;
              auVar995._28_4_ = fVar891;
              auVar734 = vinsertf64x4_avx512f
                                   (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar995,
                                    1);
              auVar734 = vaddps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
              *(undefined1 (*) [64])outptr = auVar734;
              ptr = (float *)((long)ptr + 0x40);
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)outptr + 0x40);
              iVar426 = iVar426 + 2;
            } while (iVar426 < (int)uVar425);
            uVar427 = uVar425 & 0x7ffffffe;
          }
          iVar426 = uVar425 - uVar427;
          if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
            do {
              fVar890 = *ptr1;
              fVar891 = *(float *)(*(undefined1 (*) [64])ptr + 4);
              fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 8);
              fVar936 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
              fVar398 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
              fVar399 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
              fVar935 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
              fVar400 = *(float *)(*(undefined1 (*) [64])ptr + 0x1c);
              *(float *)*(undefined1 (*) [64])outptr = fVar890 + *(float *)*(undefined1 (*) [64])ptr
              ;
              *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar890 + fVar891;
              *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar890 + fVar397;
              *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar890 + fVar936;
              *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar890 + fVar398;
              *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar890 + fVar399;
              *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar890 + fVar935;
              *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar890 + fVar400;
              ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
              ptr1 = ptr1 + 1;
              outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
              iVar426 = iVar426 + -1;
            } while (iVar426 != 0);
          }
        }
        if (iVar424 == 4) {
          uVar427 = 0;
          if (3 < (int)uVar425) {
            iVar424 = 3;
            do {
              fVar890 = ptr1[2];
              auVar921._4_4_ = fVar890;
              auVar921._0_4_ = fVar890;
              auVar921._8_4_ = fVar890;
              auVar921._12_4_ = fVar890;
              fVar890 = ptr1[3];
              auVar921._20_4_ = fVar890;
              auVar921._16_4_ = fVar890;
              auVar921._24_4_ = fVar890;
              auVar921._28_4_ = fVar890;
              fVar890 = *ptr1;
              fVar891 = ptr1[1];
              auVar734 = vinsertf64x4_avx512f
                                   (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar921,1);
              auVar734 = vaddps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
              *(undefined1 (*) [64])outptr = auVar734;
              ptr = (float *)((long)ptr + 0x40);
              ptr1 = ptr1 + 4;
              outptr = (float *)((long)outptr + 0x40);
              iVar424 = iVar424 + 4;
            } while (iVar424 < (int)uVar425);
            uVar427 = uVar425 & 0x7ffffffc;
          }
          uVar882 = uVar427 | 1;
          while ((int)uVar882 < (int)uVar425) {
            fVar890 = *ptr1;
            fVar891 = ptr1[1];
            fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 4);
            fVar936 = *(float *)(*(undefined1 (*) [64])ptr + 8);
            fVar398 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            fVar399 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
            fVar935 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
            fVar400 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
            fVar401 = *(float *)(*(undefined1 (*) [64])ptr + 0x1c);
            *(float *)*(undefined1 (*) [64])outptr = fVar890 + *(float *)*(undefined1 (*) [64])ptr;
            *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar890 + fVar397;
            *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar890 + fVar936;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar890 + fVar398;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar891 + fVar399;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar891 + fVar935;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar891 + fVar400;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar891 + fVar401;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar882 = uVar427 + 3;
            uVar427 = uVar427 + 2;
          }
          iVar424 = uVar425 - uVar427;
          if (iVar424 != 0 && (int)uVar427 <= (int)uVar425) {
            lVar428 = 0;
            do {
              fVar890 = *(float *)((long)ptr1 + lVar428);
              pfVar9 = (float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
              fVar891 = pfVar9[1];
              fVar397 = pfVar9[2];
              fVar936 = pfVar9[3];
              pfVar10 = (float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4);
              *pfVar10 = fVar890 + *pfVar9;
              pfVar10[1] = fVar890 + fVar891;
              pfVar10[2] = fVar890 + fVar397;
              pfVar10[3] = fVar890 + fVar936;
              lVar428 = lVar428 + 4;
              iVar424 = iVar424 + -1;
            } while (iVar424 != 0);
          }
        }
      }
      else if (bw == 1) {
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          auVar734 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          iVar424 = 0xf;
          do {
            auVar716 = vaddps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        if ((int)(uVar425 | 7) < (int)uVar427) {
          fVar890 = *ptr1;
          uVar882 = uVar425;
          do {
            fVar891 = *(float *)(*(undefined1 (*) [64])ptr + 4);
            fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 8);
            fVar936 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            fVar398 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
            fVar399 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
            fVar935 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
            fVar400 = *(float *)(*(undefined1 (*) [64])ptr + 0x1c);
            *(float *)*(undefined1 (*) [64])outptr = fVar890 + *(float *)*(undefined1 (*) [64])ptr;
            *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar890 + fVar891;
            *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar890 + fVar397;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar890 + fVar936;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar890 + fVar398;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar890 + fVar399;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar890 + fVar935;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar890 + fVar400;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)(uVar425 | 3) < (int)uVar427) {
          fVar890 = *ptr1;
          lVar428 = 0;
          do {
            pfVar9 = (float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
            fVar891 = pfVar9[1];
            fVar397 = pfVar9[2];
            fVar936 = pfVar9[3];
            pfVar10 = (float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4);
            *pfVar10 = fVar890 + *pfVar9;
            pfVar10[1] = fVar890 + fVar891;
            pfVar10[2] = fVar890 + fVar397;
            pfVar10[3] = fVar890 + fVar936;
            lVar428 = lVar428 + 4;
          } while ((int)(uVar425 + 3 + (int)lVar428) < (int)uVar427);
        }
      }
      else if (aw == 1) {
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr;
          uVar427 = uVar425;
          do {
            fVar890 = *ptr1;
            auVar368._4_4_ = fVar890;
            auVar368._0_4_ = fVar890;
            auVar368._8_4_ = fVar890;
            auVar368._12_4_ = fVar890;
            auVar368._16_4_ = fVar890;
            auVar368._20_4_ = fVar890;
            auVar368._24_4_ = fVar890;
            auVar368._28_4_ = fVar890;
            auVar368._32_4_ = fVar890;
            auVar368._36_4_ = fVar890;
            auVar368._40_4_ = fVar890;
            auVar368._44_4_ = fVar890;
            auVar368._48_4_ = fVar890;
            auVar368._52_4_ = fVar890;
            auVar368._56_4_ = fVar890;
            auVar368._60_4_ = fVar890;
            auVar716 = vaddps_avx512f(auVar734,auVar368);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
            uVar427 = uVar427 - 1;
          } while (uVar427 != 0);
        }
        if (iVar424 == 8) {
          auVar734 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
          uVar427 = 0;
          if (1 < (int)uVar425) {
            iVar426 = 1;
            do {
              fVar890 = *ptr1;
              fVar891 = ptr1[1];
              auVar1076._4_4_ = fVar891;
              auVar1076._0_4_ = fVar891;
              auVar1076._8_4_ = fVar891;
              auVar1076._12_4_ = fVar891;
              auVar1076._16_4_ = fVar891;
              auVar1076._20_4_ = fVar891;
              auVar1076._24_4_ = fVar891;
              auVar1076._28_4_ = fVar891;
              auVar716 = vinsertf64x4_avx512f
                                   (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar1076
                                    ,1);
              auVar716 = vaddps_avx512f(auVar716,auVar734);
              *(undefined1 (*) [64])outptr = auVar716;
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)outptr + 0x40);
              iVar426 = iVar426 + 2;
            } while (iVar426 < (int)uVar425);
            uVar427 = uVar425 & 0x7ffffffe;
          }
          iVar426 = uVar425 - uVar427;
          if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
            do {
              fVar890 = *ptr1;
              auVar323._4_4_ = fVar890;
              auVar323._0_4_ = fVar890;
              auVar323._8_4_ = fVar890;
              auVar323._12_4_ = fVar890;
              auVar323._16_4_ = fVar890;
              auVar323._20_4_ = fVar890;
              auVar323._24_4_ = fVar890;
              auVar323._28_4_ = fVar890;
              auVar674 = vaddps_avx512vl(auVar734._0_32_,auVar323);
              *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
              ptr1 = ptr1 + 1;
              outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
              iVar426 = iVar426 + -1;
            } while (iVar426 != 0);
          }
        }
        if (iVar424 == 4) {
          auVar734 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
          uVar427 = 0;
          if (3 < (int)uVar425) {
            iVar424 = 3;
            do {
              fVar890 = ptr1[2];
              auVar1015._4_4_ = fVar890;
              auVar1015._0_4_ = fVar890;
              auVar1015._8_4_ = fVar890;
              auVar1015._12_4_ = fVar890;
              fVar890 = ptr1[3];
              auVar1015._20_4_ = fVar890;
              auVar1015._16_4_ = fVar890;
              auVar1015._24_4_ = fVar890;
              auVar1015._28_4_ = fVar890;
              fVar890 = *ptr1;
              fVar891 = ptr1[1];
              auVar716 = vinsertf64x4_avx512f
                                   (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar1015,1);
              auVar716 = vaddps_avx512f(auVar716,auVar734);
              *(undefined1 (*) [64])outptr = auVar716;
              ptr1 = ptr1 + 4;
              outptr = (float *)((long)outptr + 0x40);
              iVar424 = iVar424 + 4;
            } while (iVar424 < (int)uVar425);
            uVar427 = uVar425 & 0x7ffffffc;
          }
          uVar882 = uVar427 | 1;
          while ((int)uVar882 < (int)uVar425) {
            fVar890 = *ptr1;
            fVar891 = ptr1[1];
            *(float *)*(undefined1 (*) [64])outptr = fVar890 + auVar734._0_4_;
            *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar890 + auVar734._4_4_;
            *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar890 + auVar734._8_4_;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar890 + auVar734._12_4_;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar891 + auVar734._0_4_;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar891 + auVar734._4_4_;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar891 + auVar734._8_4_;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar891 + auVar734._12_4_;
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar882 = uVar427 + 3;
            uVar427 = uVar427 + 2;
          }
          if ((int)uVar427 < (int)uVar425) {
            lVar428 = 0;
            do {
              fVar890 = ptr1[lVar428];
              auVar166._4_4_ = fVar890;
              auVar166._0_4_ = fVar890;
              auVar166._8_4_ = fVar890;
              auVar166._12_4_ = fVar890;
              auVar442 = vaddps_avx512vl(auVar734._0_16_,auVar166);
              *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
              outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
              lVar428 = lVar428 + 1;
            } while (uVar425 - uVar427 != (int)lVar428);
          }
        }
      }
    }
    break;
  case 1:
    uVar425 = bw;
    if (bw < aw) {
      uVar425 = aw;
    }
    iVar424 = bp;
    if (bp < ap) {
      iVar424 = ap;
    }
    uVar427 = iVar424 * uVar425;
    if (ap == bp) {
      if (aw == bw) {
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar734 = vsubps_avx512f(*(undefined1 (*) [64])ptr,*(undefined1 (*) [64])ptr1);
            *(undefined1 (*) [64])outptr = auVar734;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar674 = vsubps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                                *(undefined1 (*) [32])*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          auVar442 = vsubps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,
                                *(undefined1 (*) [16])*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               *(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4) -
               *(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4);
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (bw == 1) {
        fVar890 = *ptr1;
        if (iVar424 == 4) {
          auVar948 = *(undefined1 (*) [16])ptr1;
        }
        else {
          auVar948._4_4_ = fVar890;
          auVar948._0_4_ = fVar890;
          auVar948._8_4_ = fVar890;
          auVar948._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1089 = *(undefined1 (*) [32])ptr1;
        }
        else {
          auVar1089._16_16_ = auVar948;
          auVar1089._0_16_ = auVar948;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr1;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1089),auVar1089,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar716 = vsubps_avx512f(*(undefined1 (*) [64])ptr,auVar734);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar674 = vsubps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar1089);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          auVar442 = vsubps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar948);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               *(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4) - fVar890;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (aw == 1) {
        fVar890 = *ptr;
        if (iVar424 == 4) {
          auVar971 = *(undefined1 (*) [16])ptr;
        }
        else {
          auVar971._4_4_ = fVar890;
          auVar971._0_4_ = fVar890;
          auVar971._8_4_ = fVar890;
          auVar971._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1103 = *(undefined1 (*) [32])ptr;
        }
        else {
          auVar1103._16_16_ = auVar971;
          auVar1103._0_16_ = auVar971;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1103),auVar1103,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar716 = vsubps_avx512f(auVar734,*(undefined1 (*) [64])ptr1);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar674 = vsubps_avx(auVar1103,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          auVar442 = vsubps_avx(auVar971,*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               fVar890 - *(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4);
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
    }
    if (bp != 1) {
      return;
    }
    if (aw == bw) {
      uVar427 = uVar425;
      if (0 < (int)uVar425 && iVar424 == 0x10) {
        do {
          fVar890 = *ptr1;
          auVar366._4_4_ = fVar890;
          auVar366._0_4_ = fVar890;
          auVar366._8_4_ = fVar890;
          auVar366._12_4_ = fVar890;
          auVar366._16_4_ = fVar890;
          auVar366._20_4_ = fVar890;
          auVar366._24_4_ = fVar890;
          auVar366._28_4_ = fVar890;
          auVar366._32_4_ = fVar890;
          auVar366._36_4_ = fVar890;
          auVar366._40_4_ = fVar890;
          auVar366._44_4_ = fVar890;
          auVar366._48_4_ = fVar890;
          auVar366._52_4_ = fVar890;
          auVar366._56_4_ = fVar890;
          auVar366._60_4_ = fVar890;
          auVar734 = vsubps_avx512f(*(undefined1 (*) [64])ptr,auVar366);
          *(undefined1 (*) [64])outptr = auVar734;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar427 = uVar427 - 1;
        } while (uVar427 != 0);
      }
      if (iVar424 == 8) {
        uVar427 = 0;
        if (1 < (int)uVar425) {
          iVar426 = 1;
          do {
            fVar890 = *ptr1;
            fVar891 = ptr1[1];
            auVar1061._4_4_ = fVar891;
            auVar1061._0_4_ = fVar891;
            auVar1061._8_4_ = fVar891;
            auVar1061._12_4_ = fVar891;
            auVar1061._16_4_ = fVar891;
            auVar1061._20_4_ = fVar891;
            auVar1061._24_4_ = fVar891;
            auVar1061._28_4_ = fVar891;
            auVar734 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar1061
                                  ,1);
            auVar734 = vsubps_avx512f(*(undefined1 (*) [64])ptr,auVar734);
            *(undefined1 (*) [64])outptr = auVar734;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar426 = iVar426 + 2;
          } while (iVar426 < (int)uVar425);
          uVar427 = uVar425 & 0x7ffffffe;
        }
        iVar426 = uVar425 - uVar427;
        if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
          do {
            fVar890 = *ptr1;
            auVar321._4_4_ = fVar890;
            auVar321._0_4_ = fVar890;
            auVar321._8_4_ = fVar890;
            auVar321._12_4_ = fVar890;
            auVar321._16_4_ = fVar890;
            auVar321._20_4_ = fVar890;
            auVar321._24_4_ = fVar890;
            auVar321._28_4_ = fVar890;
            auVar674 = vsubps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar321);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar426 = iVar426 + -1;
          } while (iVar426 != 0);
        }
      }
      if (iVar424 != 4) {
        return;
      }
      uVar427 = 0;
      if (3 < (int)uVar425) {
        iVar424 = 3;
        do {
          fVar890 = ptr1[2];
          auVar996._4_4_ = fVar890;
          auVar996._0_4_ = fVar890;
          auVar996._8_4_ = fVar890;
          auVar996._12_4_ = fVar890;
          fVar890 = ptr1[3];
          auVar996._20_4_ = fVar890;
          auVar996._16_4_ = fVar890;
          auVar996._24_4_ = fVar890;
          auVar996._28_4_ = fVar890;
          fVar890 = *ptr1;
          fVar891 = ptr1[1];
          auVar734 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar996,1);
          auVar734 = vsubps_avx512f(*(undefined1 (*) [64])ptr,auVar734);
          *(undefined1 (*) [64])outptr = auVar734;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 4;
        } while (iVar424 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffc;
      }
      uVar882 = uVar427 | 1;
      while ((int)uVar882 < (int)uVar425) {
        fVar890 = *ptr1;
        auVar997._4_4_ = fVar890;
        auVar997._0_4_ = fVar890;
        auVar997._8_4_ = fVar890;
        auVar997._12_4_ = fVar890;
        fVar890 = ptr1[1];
        auVar997._20_4_ = fVar890;
        auVar997._16_4_ = fVar890;
        auVar997._24_4_ = fVar890;
        auVar997._28_4_ = fVar890;
        auVar674 = vsubps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar997);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar882 = uVar427 + 3;
        uVar427 = uVar427 + 2;
      }
      iVar424 = uVar425 - uVar427;
      if (iVar424 == 0 || (int)uVar425 < (int)uVar427) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar428 = 0;
      do {
        uVar11 = *(undefined4 *)((long)ptr1 + lVar428);
        auVar164._4_4_ = uVar11;
        auVar164._0_4_ = uVar11;
        auVar164._8_4_ = uVar11;
        auVar164._12_4_ = uVar11;
        auVar442 = vsubps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar428 * 4),
                                   auVar164);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar442;
        lVar428 = lVar428 + 4;
        iVar424 = iVar424 + -1;
      } while (iVar424 != 0);
      return;
    }
    if (bw == 1) {
      uVar425 = 0;
      if (0xf < (int)uVar427) {
        auVar734 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        iVar424 = 0xf;
        do {
          auVar716 = vsubps_avx512f(*(undefined1 (*) [64])ptr,auVar734);
          *(undefined1 (*) [64])outptr = auVar716;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 0x10;
        } while (iVar424 < (int)uVar427);
        uVar425 = uVar427 & 0x7ffffff0;
      }
      if ((int)(uVar425 | 7) < (int)uVar427) {
        fVar890 = *ptr1;
        auVar922._4_4_ = fVar890;
        auVar922._0_4_ = fVar890;
        auVar922._8_4_ = fVar890;
        auVar922._12_4_ = fVar890;
        auVar922._16_4_ = fVar890;
        auVar922._20_4_ = fVar890;
        auVar922._24_4_ = fVar890;
        auVar922._28_4_ = fVar890;
        uVar882 = uVar425;
        do {
          auVar674 = vsubps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar922);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar425 = uVar882 + 8;
          iVar424 = uVar882 + 0xf;
          uVar882 = uVar425;
        } while (iVar424 < (int)uVar427);
      }
      if ((int)uVar427 <= (int)(uVar425 | 3)) {
        return;
      }
      fVar890 = *ptr1;
      auVar900._4_4_ = fVar890;
      auVar900._0_4_ = fVar890;
      auVar900._8_4_ = fVar890;
      auVar900._12_4_ = fVar890;
      lVar428 = 0;
      do {
        auVar442 = vsubps_avx(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar428 * 4),
                              auVar900);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar442;
        lVar428 = lVar428 + 4;
      } while ((int)(uVar425 + 3 + (int)lVar428) < (int)uVar427);
      return;
    }
    if (aw != 1) {
      return;
    }
    if (iVar424 == 0x10) {
      auVar734 = *(undefined1 (*) [64])ptr;
      uVar427 = uVar425;
      do {
        fVar890 = *ptr1;
        auVar367._4_4_ = fVar890;
        auVar367._0_4_ = fVar890;
        auVar367._8_4_ = fVar890;
        auVar367._12_4_ = fVar890;
        auVar367._16_4_ = fVar890;
        auVar367._20_4_ = fVar890;
        auVar367._24_4_ = fVar890;
        auVar367._28_4_ = fVar890;
        auVar367._32_4_ = fVar890;
        auVar367._36_4_ = fVar890;
        auVar367._40_4_ = fVar890;
        auVar367._44_4_ = fVar890;
        auVar367._48_4_ = fVar890;
        auVar367._52_4_ = fVar890;
        auVar367._56_4_ = fVar890;
        auVar367._60_4_ = fVar890;
        auVar716 = vsubps_avx512f(auVar734,auVar367);
        *(undefined1 (*) [64])outptr = auVar716;
        ptr1 = ptr1 + 1;
        outptr = (float *)((long)outptr + 0x40);
        uVar427 = uVar427 - 1;
      } while (uVar427 != 0);
    }
    if (iVar424 == 8) {
      auVar734 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
      uVar427 = 0;
      if (1 < (int)uVar425) {
        iVar426 = 1;
        do {
          fVar890 = *ptr1;
          fVar891 = ptr1[1];
          auVar1077._4_4_ = fVar891;
          auVar1077._0_4_ = fVar891;
          auVar1077._8_4_ = fVar891;
          auVar1077._12_4_ = fVar891;
          auVar1077._16_4_ = fVar891;
          auVar1077._20_4_ = fVar891;
          auVar1077._24_4_ = fVar891;
          auVar1077._28_4_ = fVar891;
          auVar716 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar1077
                                ,1);
          auVar716 = vsubps_avx512f(auVar734,auVar716);
          *(undefined1 (*) [64])outptr = auVar716;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
          iVar426 = iVar426 + 2;
        } while (iVar426 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffe;
      }
      iVar426 = uVar425 - uVar427;
      if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
        do {
          fVar890 = *ptr1;
          auVar322._4_4_ = fVar890;
          auVar322._0_4_ = fVar890;
          auVar322._8_4_ = fVar890;
          auVar322._12_4_ = fVar890;
          auVar322._16_4_ = fVar890;
          auVar322._20_4_ = fVar890;
          auVar322._24_4_ = fVar890;
          auVar322._28_4_ = fVar890;
          auVar674 = vsubps_avx512vl(auVar734._0_32_,auVar322);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          iVar426 = iVar426 + -1;
        } while (iVar426 != 0);
      }
    }
    if (iVar424 != 4) {
      return;
    }
    auVar734 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
    uVar427 = 0;
    if (3 < (int)uVar425) {
      iVar424 = 3;
      do {
        fVar890 = ptr1[2];
        auVar1016._4_4_ = fVar890;
        auVar1016._0_4_ = fVar890;
        auVar1016._8_4_ = fVar890;
        auVar1016._12_4_ = fVar890;
        fVar890 = ptr1[3];
        auVar1016._20_4_ = fVar890;
        auVar1016._16_4_ = fVar890;
        auVar1016._24_4_ = fVar890;
        auVar1016._28_4_ = fVar890;
        fVar890 = *ptr1;
        fVar891 = ptr1[1];
        auVar716 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar1016,1);
        auVar716 = vsubps_avx512f(auVar734,auVar716);
        *(undefined1 (*) [64])outptr = auVar716;
        ptr1 = ptr1 + 4;
        outptr = (float *)((long)outptr + 0x40);
        iVar424 = iVar424 + 4;
      } while (iVar424 < (int)uVar425);
      uVar427 = uVar425 & 0x7ffffffc;
    }
    auVar442 = auVar734._0_16_;
    if ((int)(uVar427 | 1) < (int)uVar425) {
      auVar1017._16_16_ = auVar442;
      auVar1017._0_16_ = auVar442;
      uVar882 = uVar427;
      do {
        fVar890 = *ptr1;
        auVar1078._4_4_ = fVar890;
        auVar1078._0_4_ = fVar890;
        auVar1078._8_4_ = fVar890;
        auVar1078._12_4_ = fVar890;
        fVar890 = ptr1[1];
        auVar1078._20_4_ = fVar890;
        auVar1078._16_4_ = fVar890;
        auVar1078._24_4_ = fVar890;
        auVar1078._28_4_ = fVar890;
        auVar674 = vsubps_avx(auVar1017,auVar1078);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar427 = uVar882 + 2;
        iVar424 = uVar882 + 3;
        uVar882 = uVar427;
      } while (iVar424 < (int)uVar425);
    }
    if ((int)uVar425 <= (int)uVar427) {
      return;
    }
    lVar428 = 0;
    do {
      fVar890 = ptr1[lVar428];
      auVar165._4_4_ = fVar890;
      auVar165._0_4_ = fVar890;
      auVar165._8_4_ = fVar890;
      auVar165._12_4_ = fVar890;
      auVar460 = vsubps_avx512vl(auVar442,auVar165);
      *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar460;
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      lVar428 = lVar428 + 1;
    } while (uVar425 - uVar427 != (int)lVar428);
    return;
  case 2:
    uVar425 = bw;
    if (bw < aw) {
      uVar425 = aw;
    }
    iVar424 = bp;
    if (bp < ap) {
      iVar424 = ap;
    }
    uVar427 = iVar424 * uVar425;
    if (ap == bp) {
      if (aw == bw) {
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar734 = vmulps_avx512f(*(undefined1 (*) [64])ptr1,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar734;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          fVar890 = *(float *)(*(undefined1 (*) [64])ptr1 + 4);
          fVar891 = *(float *)(*(undefined1 (*) [64])ptr1 + 8);
          fVar397 = *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
          fVar936 = *(float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          fVar398 = *(float *)(*(undefined1 (*) [64])ptr1 + 0x14);
          fVar399 = *(float *)(*(undefined1 (*) [64])ptr1 + 0x18);
          fVar935 = *(float *)(*(undefined1 (*) [64])ptr1 + 0x1c);
          fVar400 = *(float *)(*(undefined1 (*) [64])ptr + 4);
          fVar401 = *(float *)(*(undefined1 (*) [64])ptr + 8);
          fVar402 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          fVar403 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          fVar404 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          fVar405 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          *(float *)*(undefined1 (*) [64])outptr =
               *(float *)*(undefined1 (*) [64])ptr1 * *(float *)*(undefined1 (*) [64])ptr;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar890 * fVar400;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar891 * fVar401;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar397 * fVar402;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar936 * fVar403;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar398 * fVar404;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar399 * fVar405;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar935;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          fVar890 = *(float *)(*(undefined1 (*) [64])ptr1 + 4);
          fVar891 = *(float *)(*(undefined1 (*) [64])ptr1 + 8);
          fVar397 = *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
          fVar936 = *(float *)(*(undefined1 (*) [64])ptr + 4);
          fVar398 = *(float *)(*(undefined1 (*) [64])ptr + 8);
          fVar399 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          *(float *)*(undefined1 (*) [64])outptr =
               *(float *)*(undefined1 (*) [64])ptr1 * *(float *)*(undefined1 (*) [64])ptr;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar890 * fVar936;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar891 * fVar398;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar397 * fVar399;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               *(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4) *
               *(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (bw == 1) {
        fVar890 = *ptr1;
        if (iVar424 == 4) {
          auVar944 = *(undefined1 (*) [16])ptr1;
        }
        else {
          auVar944._4_4_ = fVar890;
          auVar944._0_4_ = fVar890;
          auVar944._8_4_ = fVar890;
          auVar944._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1085 = *(undefined1 (*) [32])ptr1;
        }
        else {
          auVar1085._16_16_ = auVar944;
          auVar1085._0_16_ = auVar944;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr1;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1085),auVar1085,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar716 = vmulps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar1161._0_4_ = auVar1085._0_4_ * *(float *)*(undefined1 (*) [64])ptr;
          auVar1161._4_4_ = auVar1085._4_4_ * *(float *)(*(undefined1 (*) [64])ptr + 4);
          auVar1161._8_4_ = auVar1085._8_4_ * *(float *)(*(undefined1 (*) [64])ptr + 8);
          auVar1161._12_4_ = auVar1085._12_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          auVar1161._16_4_ = auVar1085._16_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          auVar1161._20_4_ = auVar1085._20_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          auVar1161._28_36_ = auVar734._28_36_;
          auVar1161._24_4_ = auVar1085._24_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          auVar734 = ZEXT3264(auVar1161._0_32_);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar1161._0_32_;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          fVar891 = *(float *)(*(undefined1 (*) [64])ptr + 4);
          fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 8);
          fVar936 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          *(float *)*(undefined1 (*) [64])outptr =
               auVar944._0_4_ * *(float *)*(undefined1 (*) [64])ptr;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar944._4_4_ * fVar891;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar944._8_4_ * fVar397;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar944._12_4_ * fVar936;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               fVar890 * *(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (aw == 1) {
        fVar890 = *ptr;
        if (iVar424 == 4) {
          auVar967 = *(undefined1 (*) [16])ptr;
        }
        else {
          auVar967._4_4_ = fVar890;
          auVar967._0_4_ = fVar890;
          auVar967._8_4_ = fVar890;
          auVar967._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1099 = *(undefined1 (*) [32])ptr;
        }
        else {
          auVar1099._16_16_ = auVar967;
          auVar1099._0_16_ = auVar967;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1099),auVar1099,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar716 = vmulps_avx512f(auVar734,*(undefined1 (*) [64])ptr1);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar1162._0_4_ = auVar1099._0_4_ * *(float *)*(undefined1 (*) [64])ptr1;
          auVar1162._4_4_ = auVar1099._4_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 4);
          auVar1162._8_4_ = auVar1099._8_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 8);
          auVar1162._12_4_ = auVar1099._12_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
          auVar1162._16_4_ = auVar1099._16_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          auVar1162._20_4_ = auVar1099._20_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 0x14);
          auVar1162._28_36_ = auVar734._28_36_;
          auVar1162._24_4_ = auVar1099._24_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 0x18);
          auVar734 = ZEXT3264(auVar1162._0_32_);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar1162._0_32_;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          fVar891 = *(float *)(*(undefined1 (*) [64])ptr1 + 4);
          fVar397 = *(float *)(*(undefined1 (*) [64])ptr1 + 8);
          fVar936 = *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
          *(float *)*(undefined1 (*) [64])outptr =
               auVar967._0_4_ * *(float *)*(undefined1 (*) [64])ptr1;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar967._4_4_ * fVar891;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar967._8_4_ * fVar397;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar967._12_4_ * fVar936;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               fVar890 * *(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4);
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
    }
    if (bp != 1) {
      return;
    }
    if (aw == bw) {
      uVar427 = uVar425;
      if (0 < (int)uVar425 && iVar424 == 0x10) {
        do {
          auVar734 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          auVar734 = vmulps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar734;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar427 = uVar427 - 1;
        } while (uVar427 != 0);
      }
      if (iVar424 == 8) {
        uVar427 = 0;
        if (1 < (int)uVar425) {
          iVar426 = 1;
          do {
            fVar890 = *ptr1;
            fVar891 = ptr1[1];
            auVar991._4_4_ = fVar891;
            auVar991._0_4_ = fVar891;
            auVar991._8_4_ = fVar891;
            auVar991._12_4_ = fVar891;
            auVar991._16_4_ = fVar891;
            auVar991._20_4_ = fVar891;
            auVar991._24_4_ = fVar891;
            auVar991._28_4_ = fVar891;
            auVar734 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar991,
                                  1);
            auVar734 = vmulps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar734;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar426 = iVar426 + 2;
          } while (iVar426 < (int)uVar425);
          uVar427 = uVar425 & 0x7ffffffe;
        }
        iVar426 = uVar425 - uVar427;
        if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
          do {
            fVar890 = *ptr1;
            fVar891 = *(float *)(*(undefined1 (*) [64])ptr + 4);
            fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 8);
            fVar936 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            fVar398 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
            fVar399 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
            fVar935 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
            *(float *)*(undefined1 (*) [64])outptr = fVar890 * *(float *)*(undefined1 (*) [64])ptr;
            *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar890 * fVar891;
            *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar890 * fVar397;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar890 * fVar936;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar890 * fVar398;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar890 * fVar399;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar890 * fVar935;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar890;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar426 = iVar426 + -1;
          } while (iVar426 != 0);
        }
      }
      if (iVar424 != 4) {
        return;
      }
      uVar427 = 0;
      if (3 < (int)uVar425) {
        iVar424 = 3;
        do {
          fVar890 = ptr1[2];
          auVar916._4_4_ = fVar890;
          auVar916._0_4_ = fVar890;
          auVar916._8_4_ = fVar890;
          auVar916._12_4_ = fVar890;
          fVar890 = ptr1[3];
          auVar916._20_4_ = fVar890;
          auVar916._16_4_ = fVar890;
          auVar916._24_4_ = fVar890;
          auVar916._28_4_ = fVar890;
          fVar890 = *ptr1;
          fVar891 = ptr1[1];
          auVar734 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar916,1);
          auVar734 = vmulps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar734;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 4;
        } while (iVar424 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffc;
      }
      uVar882 = uVar427 | 1;
      while ((int)uVar882 < (int)uVar425) {
        fVar890 = *ptr1;
        fVar891 = ptr1[1];
        fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 4);
        fVar936 = *(float *)(*(undefined1 (*) [64])ptr + 8);
        fVar398 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
        fVar399 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
        fVar935 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
        fVar400 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
        *(float *)*(undefined1 (*) [64])outptr = fVar890 * *(float *)*(undefined1 (*) [64])ptr;
        *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar890 * fVar397;
        *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar890 * fVar936;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar890 * fVar398;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar891 * fVar399;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar891 * fVar935;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar891 * fVar400;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar891;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar882 = uVar427 + 3;
        uVar427 = uVar427 + 2;
      }
      iVar424 = uVar425 - uVar427;
      if (iVar424 == 0 || (int)uVar425 < (int)uVar427) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar428 = 0;
      do {
        fVar890 = *(float *)((long)ptr1 + lVar428);
        pfVar9 = (float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
        fVar891 = pfVar9[1];
        fVar397 = pfVar9[2];
        fVar936 = pfVar9[3];
        pfVar10 = (float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4);
        *pfVar10 = fVar890 * *pfVar9;
        pfVar10[1] = fVar890 * fVar891;
        pfVar10[2] = fVar890 * fVar397;
        pfVar10[3] = fVar890 * fVar936;
        lVar428 = lVar428 + 4;
        iVar424 = iVar424 + -1;
      } while (iVar424 != 0);
      return;
    }
    if (bw == 1) {
      uVar425 = 0;
      if (0xf < (int)uVar427) {
        auVar734 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        iVar424 = 0xf;
        do {
          in_ZMM1 = vmulps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = in_ZMM1;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 0x10;
        } while (iVar424 < (int)uVar427);
        uVar425 = uVar427 & 0x7ffffff0;
      }
      if ((int)(uVar425 | 7) < (int)uVar427) {
        fVar890 = *ptr1;
        uVar882 = uVar425;
        do {
          auVar1028._0_4_ = fVar890 * *(float *)*(undefined1 (*) [64])ptr;
          auVar1028._4_4_ = fVar890 * *(float *)(*(undefined1 (*) [64])ptr + 4);
          auVar1028._8_4_ = fVar890 * *(float *)(*(undefined1 (*) [64])ptr + 8);
          auVar1028._12_4_ = fVar890 * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          auVar1028._16_4_ = fVar890 * *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          auVar1028._20_4_ = fVar890 * *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          auVar1028._28_36_ = in_ZMM1._28_36_;
          auVar1028._24_4_ = fVar890 * *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          in_ZMM1 = ZEXT3264(auVar1028._0_32_);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar1028._0_32_;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar425 = uVar882 + 8;
          iVar424 = uVar882 + 0xf;
          uVar882 = uVar425;
        } while (iVar424 < (int)uVar427);
      }
      if ((int)uVar427 <= (int)(uVar425 | 3)) {
        return;
      }
      fVar890 = *ptr1;
      lVar428 = 0;
      do {
        pfVar9 = (float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
        fVar891 = pfVar9[1];
        fVar397 = pfVar9[2];
        fVar936 = pfVar9[3];
        pfVar10 = (float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4);
        *pfVar10 = fVar890 * *pfVar9;
        pfVar10[1] = fVar890 * fVar891;
        pfVar10[2] = fVar890 * fVar397;
        pfVar10[3] = fVar890 * fVar936;
        lVar428 = lVar428 + 4;
      } while ((int)(uVar425 + 3 + (int)lVar428) < (int)uVar427);
      return;
    }
    if (aw != 1) {
      return;
    }
    if (iVar424 == 0x10) {
      auVar734 = *(undefined1 (*) [64])ptr;
      uVar427 = uVar425;
      do {
        fVar890 = *ptr1;
        auVar365._4_4_ = fVar890;
        auVar365._0_4_ = fVar890;
        auVar365._8_4_ = fVar890;
        auVar365._12_4_ = fVar890;
        auVar365._16_4_ = fVar890;
        auVar365._20_4_ = fVar890;
        auVar365._24_4_ = fVar890;
        auVar365._28_4_ = fVar890;
        auVar365._32_4_ = fVar890;
        auVar365._36_4_ = fVar890;
        auVar365._40_4_ = fVar890;
        auVar365._44_4_ = fVar890;
        auVar365._48_4_ = fVar890;
        auVar365._52_4_ = fVar890;
        auVar365._56_4_ = fVar890;
        auVar365._60_4_ = fVar890;
        auVar716 = vmulps_avx512f(auVar734,auVar365);
        *(undefined1 (*) [64])outptr = auVar716;
        ptr1 = ptr1 + 1;
        outptr = (float *)((long)outptr + 0x40);
        uVar427 = uVar427 - 1;
      } while (uVar427 != 0);
    }
    if (iVar424 == 8) {
      auVar734 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
      uVar427 = 0;
      if (1 < (int)uVar425) {
        iVar426 = 1;
        do {
          fVar890 = *ptr1;
          fVar891 = ptr1[1];
          auVar1071._4_4_ = fVar891;
          auVar1071._0_4_ = fVar891;
          auVar1071._8_4_ = fVar891;
          auVar1071._12_4_ = fVar891;
          auVar1071._16_4_ = fVar891;
          auVar1071._20_4_ = fVar891;
          auVar1071._24_4_ = fVar891;
          auVar1071._28_4_ = fVar891;
          auVar716 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar1071
                                ,1);
          auVar716 = vmulps_avx512f(auVar716,auVar734);
          *(undefined1 (*) [64])outptr = auVar716;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
          iVar426 = iVar426 + 2;
        } while (iVar426 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffe;
      }
      iVar426 = uVar425 - uVar427;
      if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
        do {
          fVar890 = *ptr1;
          auVar320._4_4_ = fVar890;
          auVar320._0_4_ = fVar890;
          auVar320._8_4_ = fVar890;
          auVar320._12_4_ = fVar890;
          auVar320._16_4_ = fVar890;
          auVar320._20_4_ = fVar890;
          auVar320._24_4_ = fVar890;
          auVar320._28_4_ = fVar890;
          auVar674 = vmulps_avx512vl(auVar734._0_32_,auVar320);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          iVar426 = iVar426 + -1;
        } while (iVar426 != 0);
      }
    }
    if (iVar424 != 4) {
      return;
    }
    auVar734 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
    uVar427 = 0;
    if (3 < (int)uVar425) {
      iVar424 = 3;
      do {
        fVar890 = ptr1[2];
        auVar1009._4_4_ = fVar890;
        auVar1009._0_4_ = fVar890;
        auVar1009._8_4_ = fVar890;
        auVar1009._12_4_ = fVar890;
        fVar890 = ptr1[3];
        auVar1009._20_4_ = fVar890;
        auVar1009._16_4_ = fVar890;
        auVar1009._24_4_ = fVar890;
        auVar1009._28_4_ = fVar890;
        fVar890 = *ptr1;
        fVar891 = ptr1[1];
        auVar716 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar1009,1);
        auVar716 = vmulps_avx512f(auVar716,auVar734);
        *(undefined1 (*) [64])outptr = auVar716;
        ptr1 = ptr1 + 4;
        outptr = (float *)((long)outptr + 0x40);
        iVar424 = iVar424 + 4;
      } while (iVar424 < (int)uVar425);
      uVar427 = uVar425 & 0x7ffffffc;
    }
    uVar882 = uVar427 | 1;
    while ((int)uVar882 < (int)uVar425) {
      fVar890 = *ptr1;
      fVar891 = ptr1[1];
      *(float *)*(undefined1 (*) [64])outptr = fVar890 * auVar734._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar890 * auVar734._4_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar890 * auVar734._8_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar890 * auVar734._12_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar891 * auVar734._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar891 * auVar734._4_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar891 * auVar734._8_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar891;
      ptr1 = ptr1 + 2;
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      uVar882 = uVar427 + 3;
      uVar427 = uVar427 + 2;
    }
    if ((int)uVar425 <= (int)uVar427) {
      ::_ps512_1[0] = ::_ps512_1[0];
      ::_ps512_1[1] = ::_ps512_1[1];
      ::_ps512_1[2] = ::_ps512_1[2];
      ::_ps512_1[3] = ::_ps512_1[3];
      ::_ps512_1[4] = ::_ps512_1[4];
      ::_ps512_1[5] = ::_ps512_1[5];
      ::_ps512_1[6] = ::_ps512_1[6];
      ::_ps512_1[7] = ::_ps512_1[7];
      ::_ps512_1[8] = ::_ps512_1[8];
      ::_ps512_1[9] = ::_ps512_1[9];
      ::_ps512_1[10] = ::_ps512_1[10];
      ::_ps512_1[0xb] = ::_ps512_1[0xb];
      ::_ps512_1[0xc] = ::_ps512_1[0xc];
      ::_ps512_1[0xd] = ::_ps512_1[0xd];
      ::_ps512_1[0xe] = ::_ps512_1[0xe];
      ::_ps512_1[0xf] = ::_ps512_1[0xf];
      ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
      ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
      ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
      ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
      ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
      ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
      ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
      ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
      ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
      ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
      ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
      ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
      ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
      ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
      ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
      ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
      ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
      ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
      ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
      ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
      ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
      ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
      ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
      ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
      ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
      ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
      ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
      ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
      ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
      ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
      ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
      ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
      ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
      ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
      ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
      ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
      ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
      ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
      ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
      ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
      ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
      ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
      ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
      ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
      ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
      ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
      ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
      ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
      ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
      ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
      ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
      ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
      ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
      ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
      ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
      ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
      ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
      ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
      ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
      ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
      ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
      ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
      ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
      ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
      ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
      ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
      ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
      ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
      ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
      ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
      ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
      ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
      ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
      ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
      ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
      ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
      ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
      ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
      ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
      ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
      ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
      ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
      ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
      ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
      ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
      ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
      ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
      ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
      ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
      ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
      ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
      ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
      ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
      ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
      ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
      ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
      ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
      ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
      ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
      ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
      ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
      ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
      ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
      ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
      ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
      ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
      ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
      ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
      ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
      ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
      ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
      ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
      ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
      ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
      ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
      ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
      ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
      ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
      ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
      ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
      ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
      ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
      ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
      ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
      ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
      ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
      ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
      ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
      ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
      ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
      ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
      ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
      ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
      ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
      ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
      ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
      ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
      ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
      ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
      ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
      ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
      ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
      ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
      ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
      ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
      ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
      ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
      ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
      ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
      ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
      ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
      ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
      ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
      ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
      ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
      ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
      ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
      ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
      ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
      ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
      _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
      _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
      _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
      _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
      _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
      _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
      _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
      _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
      _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
      _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
      _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
      _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
      _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
      _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
      _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
      _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
      _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
      _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
      _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
      _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
      _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
      _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
      _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
      _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
      _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
      _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
      _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
      _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
      _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
      _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
      _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
      _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
      _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
      _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
      _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
      _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
      _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
      _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
      _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
      _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
      _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
      _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
      _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
      _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
      _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
      _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
      _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
      _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
      _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
      _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
      _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
      _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
      _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
      _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
      _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
      _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
      _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
      _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
      _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
      _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
      _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
      _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
      _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
      _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
      _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
      _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
      _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
      _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
      _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
      _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
      _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
      _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
      _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
      _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
      _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
      _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
      _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
      _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
      _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
      _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
      _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
      _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
      _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
      _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
      _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
      _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
      _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
      _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
      _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
      _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
      _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
      _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
      _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
      _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
      _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
      _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
      _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
      _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
      _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
      _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
      _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
      _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
      _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
      _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
      _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
      _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
      _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
      _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
      _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
      _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
      _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
      _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
      _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
      _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
      _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
      _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
      _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
      _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
      _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
      _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
      _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
      _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
      _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
      _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
      _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
      _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
      _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
      _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
      _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
      _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
      _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
      _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
      _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
      _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
      _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
      _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
      _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
      _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
      _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
      _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
      _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
      _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
      _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
      _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
      _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
      _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
      _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
      _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
      _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
      _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
      _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
      _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
      _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
      _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
      _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
      _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
      _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
      _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
      _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
      _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
      _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
      _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
      _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
      _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
      _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
      _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
      _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
      _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
      _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
      _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
      _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
      _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
      _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
      _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
      _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
      _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
      _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
      _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
      _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
      _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
      _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
      _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
      _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
      _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
      _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
      _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
      _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
      _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
      _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
      _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
      _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
      _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
      _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
      _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
      _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
      _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
      _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
      _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
      _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
      _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
      _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
      _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
      _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
      _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
      _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
      _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
      _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
      _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
      _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
      _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
      _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
      _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
      _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
      _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
      _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
      _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
      _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
      _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
      _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
      _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
      _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
      _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
      _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
      _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
      return;
    }
    lVar428 = 0;
    do {
      fVar890 = ptr1[lVar428];
      auVar163._4_4_ = fVar890;
      auVar163._0_4_ = fVar890;
      auVar163._8_4_ = fVar890;
      auVar163._12_4_ = fVar890;
      auVar442 = vmulps_avx512vl(auVar734._0_16_,auVar163);
      *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      lVar428 = lVar428 + 1;
    } while (uVar425 - uVar427 != (int)lVar428);
    return;
  case 3:
    uVar425 = bw;
    if (bw < aw) {
      uVar425 = aw;
    }
    iVar424 = bp;
    if (bp < ap) {
      iVar424 = ap;
    }
    uVar427 = iVar424 * uVar425;
    if (ap == bp) {
      if (aw == bw) {
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar734 = vdivps_avx512f(*(undefined1 (*) [64])ptr,*(undefined1 (*) [64])ptr1);
            *(undefined1 (*) [64])outptr = auVar734;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar674 = vdivps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                                *(undefined1 (*) [32])*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          auVar442 = vdivps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,
                                *(undefined1 (*) [16])*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               *(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4) /
               *(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4);
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (bw == 1) {
        fVar890 = *ptr1;
        if (iVar424 == 4) {
          auVar945 = *(undefined1 (*) [16])ptr1;
        }
        else {
          auVar945._4_4_ = fVar890;
          auVar945._0_4_ = fVar890;
          auVar945._8_4_ = fVar890;
          auVar945._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1086 = *(undefined1 (*) [32])ptr1;
        }
        else {
          auVar1086._16_16_ = auVar945;
          auVar1086._0_16_ = auVar945;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr1;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1086),auVar1086,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          auVar716 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar734 = vdivps_avx512f(auVar716,auVar734);
          iVar424 = 0xf;
          do {
            auVar716 = vmulps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        if ((int)(uVar425 | 7) < (int)uVar427) {
          auVar1151._8_4_ = 0x3f800000;
          auVar1151._0_8_ = 0x3f8000003f800000;
          auVar1151._12_4_ = 0x3f800000;
          auVar1151._16_4_ = 0x3f800000;
          auVar1151._20_4_ = 0x3f800000;
          auVar1151._24_4_ = 0x3f800000;
          auVar1151._28_4_ = 0x3f800000;
          auVar674 = vdivps_avx(auVar1151,auVar1086);
          uVar882 = uVar425;
          do {
            auVar395._4_4_ = auVar674._4_4_ * *(float *)(*(undefined1 (*) [64])ptr + 4);
            auVar395._0_4_ = auVar674._0_4_ * *(float *)*(undefined1 (*) [64])ptr;
            auVar395._8_4_ = auVar674._8_4_ * *(float *)(*(undefined1 (*) [64])ptr + 8);
            auVar395._12_4_ = auVar674._12_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            auVar395._16_4_ = auVar674._16_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x10);
            auVar395._20_4_ = auVar674._20_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x14);
            auVar395._24_4_ = auVar674._24_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x18);
            auVar395._28_4_ = auVar1151._28_4_;
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar395;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
            auVar1151 = auVar395;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)(uVar425 | 3) < (int)uVar427) {
          auVar1033._8_4_ = 0x3f800000;
          auVar1033._0_8_ = 0x3f8000003f800000;
          auVar1033._12_4_ = 0x3f800000;
          auVar442 = vdivps_avx(auVar1033,auVar945);
          uVar882 = uVar425;
          do {
            fVar891 = *(float *)(*(undefined1 (*) [64])ptr + 4);
            fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 8);
            fVar936 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            *(float *)*(undefined1 (*) [64])outptr =
                 auVar442._0_4_ * *(float *)*(undefined1 (*) [64])ptr;
            *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar442._4_4_ * fVar891;
            *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar442._8_4_ * fVar397;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar442._12_4_ * fVar936;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
            uVar425 = uVar882 + 4;
            iVar424 = uVar882 + 7;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               (1.0 / fVar890) * *(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (aw == 1) {
        fVar890 = *ptr;
        if (iVar424 == 4) {
          auVar968 = *(undefined1 (*) [16])ptr;
        }
        else {
          auVar968._4_4_ = fVar890;
          auVar968._0_4_ = fVar890;
          auVar968._8_4_ = fVar890;
          auVar968._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1100 = *(undefined1 (*) [32])ptr;
        }
        else {
          auVar1100._16_16_ = auVar968;
          auVar1100._0_16_ = auVar968;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1100),auVar1100,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar716 = vdivps_avx512f(auVar734,*(undefined1 (*) [64])ptr1);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar674 = vdivps_avx(auVar1100,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          auVar442 = vdivps_avx(auVar968,*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               fVar890 / *(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4);
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
    }
    if (bp != 1) {
      return;
    }
    if (aw == bw) {
      uVar427 = uVar425;
      if (0 < (int)uVar425 && iVar424 == 0x10) {
        do {
          auVar734 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / *ptr1)));
          auVar734 = vmulps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar734;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar427 = uVar427 - 1;
        } while (uVar427 != 0);
      }
      if (iVar424 == 8) {
        uVar427 = 0;
        if (1 < (int)uVar425) {
          iVar426 = 1;
          do {
            fVar890 = *ptr1;
            fVar891 = ptr1[1];
            auVar1060._4_4_ = fVar891;
            auVar1060._0_4_ = fVar891;
            auVar1060._8_4_ = fVar891;
            auVar1060._12_4_ = fVar891;
            auVar1060._16_4_ = fVar891;
            auVar1060._20_4_ = fVar891;
            auVar1060._24_4_ = fVar891;
            auVar1060._28_4_ = fVar891;
            auVar734 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar1060
                                  ,1);
            auVar734 = vdivps_avx512f(*(undefined1 (*) [64])ptr,auVar734);
            *(undefined1 (*) [64])outptr = auVar734;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar426 = iVar426 + 2;
          } while (iVar426 < (int)uVar425);
          uVar427 = uVar425 & 0x7ffffffe;
        }
        iVar426 = uVar425 - uVar427;
        if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
          do {
            fVar935 = 1.0 / *ptr1;
            fVar890 = *(float *)(*(undefined1 (*) [64])ptr + 4);
            fVar891 = *(float *)(*(undefined1 (*) [64])ptr + 8);
            fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            fVar936 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
            fVar398 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
            fVar399 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
            *(float *)*(undefined1 (*) [64])outptr = fVar935 * *(float *)*(undefined1 (*) [64])ptr;
            *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar935 * fVar890;
            *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar935 * fVar891;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar935 * fVar397;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar935 * fVar936;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar935 * fVar398;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar935 * fVar399;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar935;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar426 = iVar426 + -1;
          } while (iVar426 != 0);
        }
      }
      if (iVar424 != 4) {
        return;
      }
      uVar427 = 0;
      if (3 < (int)uVar425) {
        iVar424 = 3;
        do {
          fVar890 = ptr1[2];
          auVar992._4_4_ = fVar890;
          auVar992._0_4_ = fVar890;
          auVar992._8_4_ = fVar890;
          auVar992._12_4_ = fVar890;
          fVar890 = ptr1[3];
          auVar992._20_4_ = fVar890;
          auVar992._16_4_ = fVar890;
          auVar992._24_4_ = fVar890;
          auVar992._28_4_ = fVar890;
          fVar890 = *ptr1;
          fVar891 = ptr1[1];
          auVar734 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar992,1);
          auVar734 = vdivps_avx512f(*(undefined1 (*) [64])ptr,auVar734);
          *(undefined1 (*) [64])outptr = auVar734;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 4;
        } while (iVar424 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffc;
      }
      uVar882 = uVar427 | 1;
      while ((int)uVar882 < (int)uVar425) {
        fVar890 = *ptr1;
        auVar993._4_4_ = fVar890;
        auVar993._0_4_ = fVar890;
        auVar993._8_4_ = fVar890;
        auVar993._12_4_ = fVar890;
        fVar890 = ptr1[1];
        auVar993._20_4_ = fVar890;
        auVar993._16_4_ = fVar890;
        auVar993._24_4_ = fVar890;
        auVar993._28_4_ = fVar890;
        auVar674 = vdivps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar993);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar882 = uVar427 + 3;
        uVar427 = uVar427 + 2;
      }
      iVar424 = uVar425 - uVar427;
      if (iVar424 == 0 || (int)uVar425 < (int)uVar427) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar428 = 0;
      do {
        fVar936 = 1.0 / *(float *)((long)ptr1 + lVar428);
        pfVar9 = (float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
        fVar890 = pfVar9[1];
        fVar891 = pfVar9[2];
        fVar397 = pfVar9[3];
        pfVar10 = (float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4);
        *pfVar10 = fVar936 * *pfVar9;
        pfVar10[1] = fVar936 * fVar890;
        pfVar10[2] = fVar936 * fVar891;
        pfVar10[3] = fVar936 * fVar397;
        lVar428 = lVar428 + 4;
        iVar424 = iVar424 + -1;
      } while (iVar424 != 0);
      return;
    }
    if (bw == 1) {
      uVar425 = 0;
      if (0xf < (int)uVar427) {
        auVar734 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / *ptr1)));
        iVar424 = 0xf;
        do {
          in_ZMM2 = vmulps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = in_ZMM2;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 0x10;
        } while (iVar424 < (int)uVar427);
        uVar425 = uVar427 & 0x7ffffff0;
      }
      if ((int)(uVar425 | 7) < (int)uVar427) {
        fVar890 = 1.0 / *ptr1;
        uVar882 = uVar425;
        do {
          auVar1110._0_4_ = fVar890 * *(float *)*(undefined1 (*) [64])ptr;
          auVar1110._4_4_ = fVar890 * *(float *)(*(undefined1 (*) [64])ptr + 4);
          auVar1110._8_4_ = fVar890 * *(float *)(*(undefined1 (*) [64])ptr + 8);
          auVar1110._12_4_ = fVar890 * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          auVar1110._16_4_ = fVar890 * *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          auVar1110._20_4_ = fVar890 * *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          auVar1110._28_36_ = in_ZMM2._28_36_;
          auVar1110._24_4_ = fVar890 * *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          in_ZMM2 = ZEXT3264(auVar1110._0_32_);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar1110._0_32_;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar425 = uVar882 + 8;
          iVar424 = uVar882 + 0xf;
          uVar882 = uVar425;
        } while (iVar424 < (int)uVar427);
      }
      if ((int)uVar427 <= (int)(uVar425 | 3)) {
        return;
      }
      fVar890 = 1.0 / *ptr1;
      lVar428 = 0;
      do {
        pfVar9 = (float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
        fVar891 = pfVar9[1];
        fVar397 = pfVar9[2];
        fVar936 = pfVar9[3];
        pfVar10 = (float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4);
        *pfVar10 = fVar890 * *pfVar9;
        pfVar10[1] = fVar890 * fVar891;
        pfVar10[2] = fVar890 * fVar397;
        pfVar10[3] = fVar890 * fVar936;
        lVar428 = lVar428 + 4;
      } while ((int)(uVar425 + 3 + (int)lVar428) < (int)uVar427);
      return;
    }
    if (aw != 1) {
      return;
    }
    if (iVar424 == 0x10) {
      auVar734 = *(undefined1 (*) [64])ptr;
      uVar427 = uVar425;
      do {
        auVar716 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / *ptr1)));
        auVar716 = vmulps_avx512f(auVar734,auVar716);
        *(undefined1 (*) [64])outptr = auVar716;
        ptr1 = ptr1 + 1;
        outptr = (float *)((long)outptr + 0x40);
        uVar427 = uVar427 - 1;
      } while (uVar427 != 0);
    }
    if (iVar424 == 8) {
      auVar734 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
      uVar427 = 0;
      if (1 < (int)uVar425) {
        iVar426 = 1;
        do {
          fVar890 = *ptr1;
          fVar891 = ptr1[1];
          auVar1072._4_4_ = fVar891;
          auVar1072._0_4_ = fVar891;
          auVar1072._8_4_ = fVar891;
          auVar1072._12_4_ = fVar891;
          auVar1072._16_4_ = fVar891;
          auVar1072._20_4_ = fVar891;
          auVar1072._24_4_ = fVar891;
          auVar1072._28_4_ = fVar891;
          auVar716 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar1072
                                ,1);
          auVar716 = vdivps_avx512f(auVar734,auVar716);
          *(undefined1 (*) [64])outptr = auVar716;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
          iVar426 = iVar426 + 2;
        } while (iVar426 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffe;
      }
      iVar426 = uVar425 - uVar427;
      if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
        do {
          fVar890 = 1.0 / *ptr1;
          *(float *)*(undefined1 (*) [64])outptr = auVar734._0_4_ * fVar890;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar734._4_4_ * fVar890;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar734._8_4_ * fVar890;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar734._12_4_ * fVar890;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = auVar734._16_4_ * fVar890;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = auVar734._20_4_ * fVar890;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar734._24_4_ * fVar890;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar890;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          iVar426 = iVar426 + -1;
        } while (iVar426 != 0);
      }
    }
    if (iVar424 != 4) {
      return;
    }
    auVar734 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
    uVar427 = 0;
    if (3 < (int)uVar425) {
      iVar424 = 3;
      do {
        fVar890 = ptr1[2];
        auVar1010._4_4_ = fVar890;
        auVar1010._0_4_ = fVar890;
        auVar1010._8_4_ = fVar890;
        auVar1010._12_4_ = fVar890;
        fVar890 = ptr1[3];
        auVar1010._20_4_ = fVar890;
        auVar1010._16_4_ = fVar890;
        auVar1010._24_4_ = fVar890;
        auVar1010._28_4_ = fVar890;
        fVar890 = *ptr1;
        fVar891 = ptr1[1];
        auVar716 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar1010,1);
        auVar716 = vdivps_avx512f(auVar734,auVar716);
        *(undefined1 (*) [64])outptr = auVar716;
        ptr1 = ptr1 + 4;
        outptr = (float *)((long)outptr + 0x40);
        iVar424 = iVar424 + 4;
      } while (iVar424 < (int)uVar425);
      uVar427 = uVar425 & 0x7ffffffc;
    }
    if ((int)(uVar427 | 1) < (int)uVar425) {
      auVar1011._16_16_ = auVar734._0_16_;
      auVar1011._0_16_ = auVar734._0_16_;
      uVar882 = uVar427;
      do {
        fVar890 = *ptr1;
        auVar1073._4_4_ = fVar890;
        auVar1073._0_4_ = fVar890;
        auVar1073._8_4_ = fVar890;
        auVar1073._12_4_ = fVar890;
        fVar890 = ptr1[1];
        auVar1073._20_4_ = fVar890;
        auVar1073._16_4_ = fVar890;
        auVar1073._24_4_ = fVar890;
        auVar1073._28_4_ = fVar890;
        auVar674 = vdivps_avx(auVar1011,auVar1073);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar427 = uVar882 + 2;
        iVar424 = uVar882 + 3;
        uVar882 = uVar427;
      } while (iVar424 < (int)uVar425);
    }
    if ((int)uVar425 <= (int)uVar427) {
      return;
    }
    lVar428 = 0;
    do {
      fVar890 = 1.0 / ptr1[lVar428];
      *(float *)*(undefined1 (*) [64])outptr = auVar734._0_4_ * fVar890;
      *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar734._4_4_ * fVar890;
      *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar734._8_4_ * fVar890;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar734._12_4_ * fVar890;
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      lVar428 = lVar428 + 1;
    } while (uVar425 - uVar427 != (int)lVar428);
    return;
  case 4:
    uVar425 = bw;
    if (bw < aw) {
      uVar425 = aw;
    }
    iVar424 = bp;
    if (bp < ap) {
      iVar424 = ap;
    }
    uVar427 = iVar424 * uVar425;
    if (ap == bp) {
      if (aw == bw) {
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar734 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,*(undefined1 (*) [64])ptr1);
            *(undefined1 (*) [64])outptr = auVar734;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar674 = vmaxps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                                *(undefined1 (*) [32])*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          auVar442 = vmaxps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,
                                *(undefined1 (*) [16])*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          auVar442 = vmaxss_avx(ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4)),
                                ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr + lVar428 * 4)));
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar442._0_4_;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (bw == 1) {
        fVar890 = *ptr1;
        if (iVar424 == 4) {
          auVar942 = *(undefined1 (*) [16])ptr1;
        }
        else {
          auVar942._4_4_ = fVar890;
          auVar942._0_4_ = fVar890;
          auVar942._8_4_ = fVar890;
          auVar942._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1083 = *(undefined1 (*) [32])ptr1;
        }
        else {
          auVar1083._16_16_ = auVar942;
          auVar1083._0_16_ = auVar942;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr1;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1083),auVar1083,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar716 = vmaxps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar674 = vmaxps_avx(auVar1083,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          auVar442 = vmaxps_avx(auVar942,*(undefined1 (*) [16])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          auVar442 = vmaxss_avx(ZEXT416((uint)fVar890),
                                ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr + lVar428 * 4)));
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar442._0_4_;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (aw == 1) {
        fVar890 = *ptr;
        if (iVar424 == 4) {
          auVar963 = *(undefined1 (*) [16])ptr;
        }
        else {
          auVar963._4_4_ = fVar890;
          auVar963._0_4_ = fVar890;
          auVar963._8_4_ = fVar890;
          auVar963._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1096 = *(undefined1 (*) [32])ptr;
        }
        else {
          auVar1096._16_16_ = auVar963;
          auVar1096._0_16_ = auVar963;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1096),auVar1096,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar716 = vmaxps_avx512f(auVar734,*(undefined1 (*) [64])ptr1);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar674 = vmaxps_avx(auVar1096,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          auVar442 = vmaxps_avx(auVar963,*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          auVar442 = vmaxss_avx(ZEXT416((uint)fVar890),
                                ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4)));
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar442._0_4_;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
    }
    if (bp != 1) {
      return;
    }
    if (aw == bw) {
      uVar427 = uVar425;
      if (0 < (int)uVar425 && iVar424 == 0x10) {
        do {
          fVar890 = *ptr1;
          auVar363._4_4_ = fVar890;
          auVar363._0_4_ = fVar890;
          auVar363._8_4_ = fVar890;
          auVar363._12_4_ = fVar890;
          auVar363._16_4_ = fVar890;
          auVar363._20_4_ = fVar890;
          auVar363._24_4_ = fVar890;
          auVar363._28_4_ = fVar890;
          auVar363._32_4_ = fVar890;
          auVar363._36_4_ = fVar890;
          auVar363._40_4_ = fVar890;
          auVar363._44_4_ = fVar890;
          auVar363._48_4_ = fVar890;
          auVar363._52_4_ = fVar890;
          auVar363._56_4_ = fVar890;
          auVar363._60_4_ = fVar890;
          auVar734 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,auVar363);
          *(undefined1 (*) [64])outptr = auVar734;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar427 = uVar427 - 1;
        } while (uVar427 != 0);
      }
      if (iVar424 == 8) {
        uVar427 = 0;
        if (1 < (int)uVar425) {
          iVar426 = 1;
          do {
            fVar890 = *ptr1;
            fVar891 = ptr1[1];
            auVar986._4_4_ = fVar891;
            auVar986._0_4_ = fVar891;
            auVar986._8_4_ = fVar891;
            auVar986._12_4_ = fVar891;
            auVar986._16_4_ = fVar891;
            auVar986._20_4_ = fVar891;
            auVar986._24_4_ = fVar891;
            auVar986._28_4_ = fVar891;
            auVar734 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar986,
                                  1);
            auVar734 = vmaxps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar734;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar426 = iVar426 + 2;
          } while (iVar426 < (int)uVar425);
          uVar427 = uVar425 & 0x7ffffffe;
        }
        iVar426 = uVar425 - uVar427;
        if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
          do {
            fVar890 = *ptr1;
            auVar318._4_4_ = fVar890;
            auVar318._0_4_ = fVar890;
            auVar318._8_4_ = fVar890;
            auVar318._12_4_ = fVar890;
            auVar318._16_4_ = fVar890;
            auVar318._20_4_ = fVar890;
            auVar318._24_4_ = fVar890;
            auVar318._28_4_ = fVar890;
            auVar674 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar318);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar426 = iVar426 + -1;
          } while (iVar426 != 0);
        }
      }
      if (iVar424 != 4) {
        return;
      }
      uVar427 = 0;
      if (3 < (int)uVar425) {
        iVar424 = 3;
        do {
          fVar890 = ptr1[2];
          auVar912._4_4_ = fVar890;
          auVar912._0_4_ = fVar890;
          auVar912._8_4_ = fVar890;
          auVar912._12_4_ = fVar890;
          fVar890 = ptr1[3];
          auVar912._20_4_ = fVar890;
          auVar912._16_4_ = fVar890;
          auVar912._24_4_ = fVar890;
          auVar912._28_4_ = fVar890;
          fVar890 = *ptr1;
          fVar891 = ptr1[1];
          auVar734 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar912,1);
          auVar734 = vmaxps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar734;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 4;
        } while (iVar424 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffc;
      }
      uVar882 = uVar427 | 1;
      while ((int)uVar882 < (int)uVar425) {
        fVar890 = *ptr1;
        auVar913._4_4_ = fVar890;
        auVar913._0_4_ = fVar890;
        auVar913._8_4_ = fVar890;
        auVar913._12_4_ = fVar890;
        fVar890 = ptr1[1];
        auVar913._20_4_ = fVar890;
        auVar913._16_4_ = fVar890;
        auVar913._24_4_ = fVar890;
        auVar913._28_4_ = fVar890;
        auVar674 = vmaxps_avx(auVar913,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar882 = uVar427 + 3;
        uVar427 = uVar427 + 2;
      }
      iVar424 = uVar425 - uVar427;
      if (iVar424 == 0 || (int)uVar425 < (int)uVar427) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar428 = 0;
      do {
        uVar11 = *(undefined4 *)((long)ptr1 + lVar428);
        auVar161._4_4_ = uVar11;
        auVar161._0_4_ = uVar11;
        auVar161._8_4_ = uVar11;
        auVar161._12_4_ = uVar11;
        auVar442 = vmaxps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar428 * 4),
                                   auVar161);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar442;
        lVar428 = lVar428 + 4;
        iVar424 = iVar424 + -1;
      } while (iVar424 != 0);
      return;
    }
    if (bw == 1) {
      uVar425 = 0;
      if (0xf < (int)uVar427) {
        auVar734 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        iVar424 = 0xf;
        do {
          auVar716 = vmaxps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar716;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 0x10;
        } while (iVar424 < (int)uVar427);
        uVar425 = uVar427 & 0x7ffffff0;
      }
      if ((int)(uVar425 | 7) < (int)uVar427) {
        fVar890 = *ptr1;
        auVar914._4_4_ = fVar890;
        auVar914._0_4_ = fVar890;
        auVar914._8_4_ = fVar890;
        auVar914._12_4_ = fVar890;
        auVar914._16_4_ = fVar890;
        auVar914._20_4_ = fVar890;
        auVar914._24_4_ = fVar890;
        auVar914._28_4_ = fVar890;
        uVar882 = uVar425;
        do {
          auVar674 = vmaxps_avx(auVar914,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar425 = uVar882 + 8;
          iVar424 = uVar882 + 0xf;
          uVar882 = uVar425;
        } while (iVar424 < (int)uVar427);
      }
      if ((int)uVar427 <= (int)(uVar425 | 3)) {
        return;
      }
      fVar890 = *ptr1;
      auVar895._4_4_ = fVar890;
      auVar895._0_4_ = fVar890;
      auVar895._8_4_ = fVar890;
      auVar895._12_4_ = fVar890;
      lVar428 = 0;
      do {
        auVar442 = vmaxps_avx(auVar895,*(undefined1 (*) [16])
                                        (*(undefined1 (*) [64])ptr + lVar428 * 4));
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar442;
        lVar428 = lVar428 + 4;
      } while ((int)(uVar425 + 3 + (int)lVar428) < (int)uVar427);
      return;
    }
    if (aw != 1) {
      return;
    }
    if (iVar424 == 0x10) {
      auVar734 = *(undefined1 (*) [64])ptr;
      uVar427 = uVar425;
      do {
        fVar890 = *ptr1;
        auVar364._4_4_ = fVar890;
        auVar364._0_4_ = fVar890;
        auVar364._8_4_ = fVar890;
        auVar364._12_4_ = fVar890;
        auVar364._16_4_ = fVar890;
        auVar364._20_4_ = fVar890;
        auVar364._24_4_ = fVar890;
        auVar364._28_4_ = fVar890;
        auVar364._32_4_ = fVar890;
        auVar364._36_4_ = fVar890;
        auVar364._40_4_ = fVar890;
        auVar364._44_4_ = fVar890;
        auVar364._48_4_ = fVar890;
        auVar364._52_4_ = fVar890;
        auVar364._56_4_ = fVar890;
        auVar364._60_4_ = fVar890;
        auVar716 = vmaxps_avx512f(auVar734,auVar364);
        *(undefined1 (*) [64])outptr = auVar716;
        ptr1 = ptr1 + 1;
        outptr = (float *)((long)outptr + 0x40);
        uVar427 = uVar427 - 1;
      } while (uVar427 != 0);
    }
    if (iVar424 == 8) {
      auVar734 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
      uVar427 = 0;
      if (1 < (int)uVar425) {
        iVar426 = 1;
        do {
          fVar890 = *ptr1;
          fVar891 = ptr1[1];
          auVar1067._4_4_ = fVar891;
          auVar1067._0_4_ = fVar891;
          auVar1067._8_4_ = fVar891;
          auVar1067._12_4_ = fVar891;
          auVar1067._16_4_ = fVar891;
          auVar1067._20_4_ = fVar891;
          auVar1067._24_4_ = fVar891;
          auVar1067._28_4_ = fVar891;
          auVar716 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar1067
                                ,1);
          auVar716 = vmaxps_avx512f(auVar734,auVar716);
          *(undefined1 (*) [64])outptr = auVar716;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
          iVar426 = iVar426 + 2;
        } while (iVar426 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffe;
      }
      iVar426 = uVar425 - uVar427;
      if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
        do {
          fVar890 = *ptr1;
          auVar319._4_4_ = fVar890;
          auVar319._0_4_ = fVar890;
          auVar319._8_4_ = fVar890;
          auVar319._12_4_ = fVar890;
          auVar319._16_4_ = fVar890;
          auVar319._20_4_ = fVar890;
          auVar319._24_4_ = fVar890;
          auVar319._28_4_ = fVar890;
          auVar674 = vmaxps_avx512vl(auVar734._0_32_,auVar319);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          iVar426 = iVar426 + -1;
        } while (iVar426 != 0);
      }
    }
    if (iVar424 != 4) {
      return;
    }
    auVar734 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
    uVar427 = 0;
    if (3 < (int)uVar425) {
      iVar424 = 3;
      do {
        fVar890 = ptr1[2];
        auVar1007._4_4_ = fVar890;
        auVar1007._0_4_ = fVar890;
        auVar1007._8_4_ = fVar890;
        auVar1007._12_4_ = fVar890;
        fVar890 = ptr1[3];
        auVar1007._20_4_ = fVar890;
        auVar1007._16_4_ = fVar890;
        auVar1007._24_4_ = fVar890;
        auVar1007._28_4_ = fVar890;
        fVar890 = *ptr1;
        fVar891 = ptr1[1];
        auVar716 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar1007,1);
        auVar716 = vmaxps_avx512f(auVar734,auVar716);
        *(undefined1 (*) [64])outptr = auVar716;
        ptr1 = ptr1 + 4;
        outptr = (float *)((long)outptr + 0x40);
        iVar424 = iVar424 + 4;
      } while (iVar424 < (int)uVar425);
      uVar427 = uVar425 & 0x7ffffffc;
    }
    auVar442 = auVar734._0_16_;
    if ((int)(uVar427 | 1) < (int)uVar425) {
      auVar1008._16_16_ = auVar442;
      auVar1008._0_16_ = auVar442;
      uVar882 = uVar427;
      do {
        fVar890 = *ptr1;
        auVar1068._4_4_ = fVar890;
        auVar1068._0_4_ = fVar890;
        auVar1068._8_4_ = fVar890;
        auVar1068._12_4_ = fVar890;
        fVar890 = ptr1[1];
        auVar1068._20_4_ = fVar890;
        auVar1068._16_4_ = fVar890;
        auVar1068._24_4_ = fVar890;
        auVar1068._28_4_ = fVar890;
        auVar674 = vmaxps_avx(auVar1008,auVar1068);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar427 = uVar882 + 2;
        iVar424 = uVar882 + 3;
        uVar882 = uVar427;
      } while (iVar424 < (int)uVar425);
    }
    if ((int)uVar425 <= (int)uVar427) {
      return;
    }
    lVar428 = 0;
    do {
      fVar890 = ptr1[lVar428];
      auVar162._4_4_ = fVar890;
      auVar162._0_4_ = fVar890;
      auVar162._8_4_ = fVar890;
      auVar162._12_4_ = fVar890;
      auVar460 = vmaxps_avx512vl(auVar442,auVar162);
      *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar460;
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      lVar428 = lVar428 + 1;
    } while (uVar425 - uVar427 != (int)lVar428);
    return;
  case 5:
    uVar425 = bw;
    if (bw < aw) {
      uVar425 = aw;
    }
    iVar424 = bp;
    if (bp < ap) {
      iVar424 = ap;
    }
    uVar427 = iVar424 * uVar425;
    if (ap == bp) {
      if (aw == bw) {
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar734 = vminps_avx512f(*(undefined1 (*) [64])ptr,*(undefined1 (*) [64])ptr1);
            *(undefined1 (*) [64])outptr = auVar734;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar674 = vminps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                                *(undefined1 (*) [32])*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          auVar442 = vminps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,
                                *(undefined1 (*) [16])*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          auVar442 = vminss_avx(ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4)),
                                ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr + lVar428 * 4)));
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar442._0_4_;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (bw == 1) {
        fVar890 = *ptr1;
        if (iVar424 == 4) {
          auVar949 = *(undefined1 (*) [16])ptr1;
        }
        else {
          auVar949._4_4_ = fVar890;
          auVar949._0_4_ = fVar890;
          auVar949._8_4_ = fVar890;
          auVar949._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1090 = *(undefined1 (*) [32])ptr1;
        }
        else {
          auVar1090._16_16_ = auVar949;
          auVar1090._0_16_ = auVar949;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr1;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1090),auVar1090,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar716 = vminps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar674 = vminps_avx(auVar1090,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          auVar442 = vminps_avx(auVar949,*(undefined1 (*) [16])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          auVar442 = vminss_avx(ZEXT416((uint)fVar890),
                                ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr + lVar428 * 4)));
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar442._0_4_;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (aw == 1) {
        fVar890 = *ptr;
        if (iVar424 == 4) {
          auVar972 = *(undefined1 (*) [16])ptr;
        }
        else {
          auVar972._4_4_ = fVar890;
          auVar972._0_4_ = fVar890;
          auVar972._8_4_ = fVar890;
          auVar972._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1104 = *(undefined1 (*) [32])ptr;
        }
        else {
          auVar1104._16_16_ = auVar972;
          auVar1104._0_16_ = auVar972;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1104),auVar1104,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar716 = vminps_avx512f(auVar734,*(undefined1 (*) [64])ptr1);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar674 = vminps_avx(auVar1104,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          auVar442 = vminps_avx(auVar972,*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          auVar442 = vminss_avx(ZEXT416((uint)fVar890),
                                ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4)));
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar442._0_4_;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
    }
    if (bp != 1) {
      return;
    }
    if (aw == bw) {
      uVar427 = uVar425;
      if (0 < (int)uVar425 && iVar424 == 0x10) {
        do {
          fVar890 = *ptr1;
          auVar361._4_4_ = fVar890;
          auVar361._0_4_ = fVar890;
          auVar361._8_4_ = fVar890;
          auVar361._12_4_ = fVar890;
          auVar361._16_4_ = fVar890;
          auVar361._20_4_ = fVar890;
          auVar361._24_4_ = fVar890;
          auVar361._28_4_ = fVar890;
          auVar361._32_4_ = fVar890;
          auVar361._36_4_ = fVar890;
          auVar361._40_4_ = fVar890;
          auVar361._44_4_ = fVar890;
          auVar361._48_4_ = fVar890;
          auVar361._52_4_ = fVar890;
          auVar361._56_4_ = fVar890;
          auVar361._60_4_ = fVar890;
          auVar734 = vminps_avx512f(*(undefined1 (*) [64])ptr,auVar361);
          *(undefined1 (*) [64])outptr = auVar734;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar427 = uVar427 - 1;
        } while (uVar427 != 0);
      }
      if (iVar424 == 8) {
        uVar427 = 0;
        if (1 < (int)uVar425) {
          iVar426 = 1;
          do {
            fVar890 = *ptr1;
            fVar891 = ptr1[1];
            auVar998._4_4_ = fVar891;
            auVar998._0_4_ = fVar891;
            auVar998._8_4_ = fVar891;
            auVar998._12_4_ = fVar891;
            auVar998._16_4_ = fVar891;
            auVar998._20_4_ = fVar891;
            auVar998._24_4_ = fVar891;
            auVar998._28_4_ = fVar891;
            auVar734 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar998,
                                  1);
            auVar734 = vminps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar734;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar426 = iVar426 + 2;
          } while (iVar426 < (int)uVar425);
          uVar427 = uVar425 & 0x7ffffffe;
        }
        iVar426 = uVar425 - uVar427;
        if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
          do {
            fVar890 = *ptr1;
            auVar316._4_4_ = fVar890;
            auVar316._0_4_ = fVar890;
            auVar316._8_4_ = fVar890;
            auVar316._12_4_ = fVar890;
            auVar316._16_4_ = fVar890;
            auVar316._20_4_ = fVar890;
            auVar316._24_4_ = fVar890;
            auVar316._28_4_ = fVar890;
            auVar674 = vminps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar316);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar426 = iVar426 + -1;
          } while (iVar426 != 0);
        }
      }
      if (iVar424 != 4) {
        return;
      }
      uVar427 = 0;
      if (3 < (int)uVar425) {
        iVar424 = 3;
        do {
          fVar890 = ptr1[2];
          auVar923._4_4_ = fVar890;
          auVar923._0_4_ = fVar890;
          auVar923._8_4_ = fVar890;
          auVar923._12_4_ = fVar890;
          fVar890 = ptr1[3];
          auVar923._20_4_ = fVar890;
          auVar923._16_4_ = fVar890;
          auVar923._24_4_ = fVar890;
          auVar923._28_4_ = fVar890;
          fVar890 = *ptr1;
          fVar891 = ptr1[1];
          auVar734 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar923,1);
          auVar734 = vminps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar734;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 4;
        } while (iVar424 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffc;
      }
      uVar882 = uVar427 | 1;
      while ((int)uVar882 < (int)uVar425) {
        fVar890 = *ptr1;
        auVar924._4_4_ = fVar890;
        auVar924._0_4_ = fVar890;
        auVar924._8_4_ = fVar890;
        auVar924._12_4_ = fVar890;
        fVar890 = ptr1[1];
        auVar924._20_4_ = fVar890;
        auVar924._16_4_ = fVar890;
        auVar924._24_4_ = fVar890;
        auVar924._28_4_ = fVar890;
        auVar674 = vminps_avx(auVar924,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar882 = uVar427 + 3;
        uVar427 = uVar427 + 2;
      }
      iVar424 = uVar425 - uVar427;
      if (iVar424 == 0 || (int)uVar425 < (int)uVar427) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar428 = 0;
      do {
        uVar11 = *(undefined4 *)((long)ptr1 + lVar428);
        auVar159._4_4_ = uVar11;
        auVar159._0_4_ = uVar11;
        auVar159._8_4_ = uVar11;
        auVar159._12_4_ = uVar11;
        auVar442 = vminps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar428 * 4),
                                   auVar159);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar442;
        lVar428 = lVar428 + 4;
        iVar424 = iVar424 + -1;
      } while (iVar424 != 0);
      return;
    }
    if (bw == 1) {
      uVar425 = 0;
      if (0xf < (int)uVar427) {
        auVar734 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        iVar424 = 0xf;
        do {
          auVar716 = vminps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar716;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 0x10;
        } while (iVar424 < (int)uVar427);
        uVar425 = uVar427 & 0x7ffffff0;
      }
      if ((int)(uVar425 | 7) < (int)uVar427) {
        fVar890 = *ptr1;
        auVar925._4_4_ = fVar890;
        auVar925._0_4_ = fVar890;
        auVar925._8_4_ = fVar890;
        auVar925._12_4_ = fVar890;
        auVar925._16_4_ = fVar890;
        auVar925._20_4_ = fVar890;
        auVar925._24_4_ = fVar890;
        auVar925._28_4_ = fVar890;
        uVar882 = uVar425;
        do {
          auVar674 = vminps_avx(auVar925,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar425 = uVar882 + 8;
          iVar424 = uVar882 + 0xf;
          uVar882 = uVar425;
        } while (iVar424 < (int)uVar427);
      }
      if ((int)uVar427 <= (int)(uVar425 | 3)) {
        return;
      }
      fVar890 = *ptr1;
      auVar901._4_4_ = fVar890;
      auVar901._0_4_ = fVar890;
      auVar901._8_4_ = fVar890;
      auVar901._12_4_ = fVar890;
      lVar428 = 0;
      do {
        auVar442 = vminps_avx(auVar901,*(undefined1 (*) [16])
                                        (*(undefined1 (*) [64])ptr + lVar428 * 4));
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar442;
        lVar428 = lVar428 + 4;
      } while ((int)(uVar425 + 3 + (int)lVar428) < (int)uVar427);
      return;
    }
    if (aw != 1) {
      return;
    }
    if (iVar424 == 0x10) {
      auVar734 = *(undefined1 (*) [64])ptr;
      uVar427 = uVar425;
      do {
        fVar890 = *ptr1;
        auVar362._4_4_ = fVar890;
        auVar362._0_4_ = fVar890;
        auVar362._8_4_ = fVar890;
        auVar362._12_4_ = fVar890;
        auVar362._16_4_ = fVar890;
        auVar362._20_4_ = fVar890;
        auVar362._24_4_ = fVar890;
        auVar362._28_4_ = fVar890;
        auVar362._32_4_ = fVar890;
        auVar362._36_4_ = fVar890;
        auVar362._40_4_ = fVar890;
        auVar362._44_4_ = fVar890;
        auVar362._48_4_ = fVar890;
        auVar362._52_4_ = fVar890;
        auVar362._56_4_ = fVar890;
        auVar362._60_4_ = fVar890;
        auVar716 = vminps_avx512f(auVar734,auVar362);
        *(undefined1 (*) [64])outptr = auVar716;
        ptr1 = ptr1 + 1;
        outptr = (float *)((long)outptr + 0x40);
        uVar427 = uVar427 - 1;
      } while (uVar427 != 0);
    }
    if (iVar424 == 8) {
      auVar734 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
      uVar427 = 0;
      if (1 < (int)uVar425) {
        iVar426 = 1;
        do {
          fVar890 = *ptr1;
          fVar891 = ptr1[1];
          auVar1079._4_4_ = fVar891;
          auVar1079._0_4_ = fVar891;
          auVar1079._8_4_ = fVar891;
          auVar1079._12_4_ = fVar891;
          auVar1079._16_4_ = fVar891;
          auVar1079._20_4_ = fVar891;
          auVar1079._24_4_ = fVar891;
          auVar1079._28_4_ = fVar891;
          auVar716 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar1079
                                ,1);
          auVar716 = vminps_avx512f(auVar734,auVar716);
          *(undefined1 (*) [64])outptr = auVar716;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
          iVar426 = iVar426 + 2;
        } while (iVar426 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffe;
      }
      iVar426 = uVar425 - uVar427;
      if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
        do {
          fVar890 = *ptr1;
          auVar317._4_4_ = fVar890;
          auVar317._0_4_ = fVar890;
          auVar317._8_4_ = fVar890;
          auVar317._12_4_ = fVar890;
          auVar317._16_4_ = fVar890;
          auVar317._20_4_ = fVar890;
          auVar317._24_4_ = fVar890;
          auVar317._28_4_ = fVar890;
          auVar674 = vminps_avx512vl(auVar734._0_32_,auVar317);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          iVar426 = iVar426 + -1;
        } while (iVar426 != 0);
      }
    }
    if (iVar424 != 4) {
      return;
    }
    auVar734 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
    uVar427 = 0;
    if (3 < (int)uVar425) {
      iVar424 = 3;
      do {
        fVar890 = ptr1[2];
        auVar1018._4_4_ = fVar890;
        auVar1018._0_4_ = fVar890;
        auVar1018._8_4_ = fVar890;
        auVar1018._12_4_ = fVar890;
        fVar890 = ptr1[3];
        auVar1018._20_4_ = fVar890;
        auVar1018._16_4_ = fVar890;
        auVar1018._24_4_ = fVar890;
        auVar1018._28_4_ = fVar890;
        fVar890 = *ptr1;
        fVar891 = ptr1[1];
        auVar716 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar1018,1);
        auVar716 = vminps_avx512f(auVar734,auVar716);
        *(undefined1 (*) [64])outptr = auVar716;
        ptr1 = ptr1 + 4;
        outptr = (float *)((long)outptr + 0x40);
        iVar424 = iVar424 + 4;
      } while (iVar424 < (int)uVar425);
      uVar427 = uVar425 & 0x7ffffffc;
    }
    auVar442 = auVar734._0_16_;
    if ((int)(uVar427 | 1) < (int)uVar425) {
      auVar1019._16_16_ = auVar442;
      auVar1019._0_16_ = auVar442;
      uVar882 = uVar427;
      do {
        fVar890 = *ptr1;
        auVar1080._4_4_ = fVar890;
        auVar1080._0_4_ = fVar890;
        auVar1080._8_4_ = fVar890;
        auVar1080._12_4_ = fVar890;
        fVar890 = ptr1[1];
        auVar1080._20_4_ = fVar890;
        auVar1080._16_4_ = fVar890;
        auVar1080._24_4_ = fVar890;
        auVar1080._28_4_ = fVar890;
        auVar674 = vminps_avx(auVar1019,auVar1080);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar427 = uVar882 + 2;
        iVar424 = uVar882 + 3;
        uVar882 = uVar427;
      } while (iVar424 < (int)uVar425);
    }
    if ((int)uVar425 <= (int)uVar427) {
      return;
    }
    lVar428 = 0;
    do {
      fVar890 = ptr1[lVar428];
      auVar160._4_4_ = fVar890;
      auVar160._0_4_ = fVar890;
      auVar160._8_4_ = fVar890;
      auVar160._12_4_ = fVar890;
      auVar460 = vminps_avx512vl(auVar442,auVar160);
      *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar460;
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      lVar428 = lVar428 + 1;
    } while (uVar425 - uVar427 != (int)lVar428);
    return;
  case 6:
    uVar425 = bw;
    if (bw < aw) {
      uVar425 = aw;
    }
    iVar424 = bp;
    if (bp < ap) {
      iVar424 = ap;
    }
    uVar427 = iVar424 * uVar425;
    if (ap == bp) {
      if (aw == bw) {
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          in_ZMM3 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar734 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar716 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar717 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
          auVar718 = vpxord_avx512f(in_ZMM3,auVar716);
          auVar719 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
          auVar720 = vpxord_avx512f(auVar719,auVar716);
          auVar716 = vpxord_avx512f(auVar717,auVar716);
          iVar424 = 0xf;
          auVar442 = vxorps_avx512vl(auVar472,auVar472);
          auVar721 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
          do {
            auVar722 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,
                                      (undefined1  [64])_ps512_min_norm_pos);
            auVar723 = vpsrld_avx512f(auVar722,0x17);
            auVar722 = vpternlogd_avx512f(auVar722,in_ZMM3,(undefined1  [64])_ps512_inv_mant_mask,
                                          0xec);
            uVar47 = vcmpps_avx512f(auVar722,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar724 = vsubps_avx512f(auVar722,(undefined1  [64])afVar407);
            auVar722 = vaddps_avx512f(auVar724,auVar722);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar742._0_4_ = (uint)bVar12 * auVar722._0_4_ | (uint)!bVar12 * auVar724._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar742._4_4_ = (uint)bVar12 * auVar722._4_4_ | (uint)!bVar12 * auVar724._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar742._8_4_ = (uint)bVar12 * auVar722._8_4_ | (uint)!bVar12 * auVar724._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar742._12_4_ = (uint)bVar12 * auVar722._12_4_ | (uint)!bVar12 * auVar724._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar742._16_4_ = (uint)bVar12 * auVar722._16_4_ | (uint)!bVar12 * auVar724._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar742._20_4_ = (uint)bVar12 * auVar722._20_4_ | (uint)!bVar12 * auVar724._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar742._24_4_ = (uint)bVar12 * auVar722._24_4_ | (uint)!bVar12 * auVar724._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar742._28_4_ = (uint)bVar12 * auVar722._28_4_ | (uint)!bVar12 * auVar724._28_4_;
            bVar29 = (byte)(uVar47 >> 8);
            bVar12 = (bool)(bVar29 & 1);
            auVar742._32_4_ = (uint)bVar12 * auVar722._32_4_ | (uint)!bVar12 * auVar724._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar742._36_4_ = (uint)bVar12 * auVar722._36_4_ | (uint)!bVar12 * auVar724._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar742._40_4_ = (uint)bVar12 * auVar722._40_4_ | (uint)!bVar12 * auVar724._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar742._44_4_ = (uint)bVar12 * auVar722._44_4_ | (uint)!bVar12 * auVar724._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar742._48_4_ = (uint)bVar12 * auVar722._48_4_ | (uint)!bVar12 * auVar724._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar742._52_4_ = (uint)bVar12 * auVar722._52_4_ | (uint)!bVar12 * auVar724._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar742._56_4_ = (uint)bVar12 * auVar722._56_4_ | (uint)!bVar12 * auVar724._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar742._60_4_ = (uint)bVar12 * auVar722._60_4_ | (uint)!bVar12 * auVar724._60_4_;
            auVar722 = vfmadd132ps_avx512f(auVar742,(undefined1  [64])afVar416,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar742,(undefined1  [64])afVar417);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar742,(undefined1  [64])afVar418);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar742,(undefined1  [64])afVar419);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar742,(undefined1  [64])afVar420);
            auVar724 = vmulps_avx512f(auVar742,auVar742);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar742,(undefined1  [64])afVar421);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar742,(undefined1  [64])afVar422);
            auVar725 = vmulps_avx512f(auVar724,auVar742);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar742,(undefined1  [64])afVar423);
            auVar722 = vfmadd213ps_avx512f(auVar725,auVar722,auVar742);
            auVar723 = vpsubd_avx512f(auVar723,auVar734);
            auVar723 = vcvtdq2ps_avx512f(auVar723);
            auVar725 = vaddps_avx512f(auVar723,(undefined1  [64])afVar407);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar743._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar725._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar743._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar725._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar743._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar725._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar743._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar725._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar743._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar725._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar743._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar725._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar743._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar725._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar743._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar725._28_4_;
            bVar12 = (bool)(bVar29 & 1);
            auVar743._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar725._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar743._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar725._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar743._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar725._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar743._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar725._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar743._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar725._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar743._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar725._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar743._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar725._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar743._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar725._60_4_;
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar743,auVar717);
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar718,auVar724);
            uVar47 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar442),2);
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar719,auVar743);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar744._0_4_ = (uint)bVar12 * auVar721._0_4_ | (uint)!bVar12 * auVar722._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar744._4_4_ = (uint)bVar12 * auVar721._4_4_ | (uint)!bVar12 * auVar722._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar744._8_4_ = (uint)bVar12 * auVar721._8_4_ | (uint)!bVar12 * auVar722._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar744._12_4_ = (uint)bVar12 * auVar721._12_4_ | (uint)!bVar12 * auVar722._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar744._16_4_ = (uint)bVar12 * auVar721._16_4_ | (uint)!bVar12 * auVar722._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar744._20_4_ = (uint)bVar12 * auVar721._20_4_ | (uint)!bVar12 * auVar722._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar744._24_4_ = (uint)bVar12 * auVar721._24_4_ | (uint)!bVar12 * auVar722._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar744._28_4_ = (uint)bVar12 * auVar721._28_4_ | (uint)!bVar12 * auVar722._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            auVar744._32_4_ = (uint)bVar12 * auVar721._32_4_ | (uint)!bVar12 * auVar722._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar744._36_4_ = (uint)bVar12 * auVar721._36_4_ | (uint)!bVar12 * auVar722._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar744._40_4_ = (uint)bVar12 * auVar721._40_4_ | (uint)!bVar12 * auVar722._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar744._44_4_ = (uint)bVar12 * auVar721._44_4_ | (uint)!bVar12 * auVar722._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar744._48_4_ = (uint)bVar12 * auVar721._48_4_ | (uint)!bVar12 * auVar722._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar744._52_4_ = (uint)bVar12 * auVar721._52_4_ | (uint)!bVar12 * auVar722._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar744._56_4_ = (uint)bVar12 * auVar721._56_4_ | (uint)!bVar12 * auVar722._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar744._60_4_ = (uint)bVar12 * auVar721._60_4_ | (uint)!bVar12 * auVar722._60_4_;
            auVar722 = vmulps_avx512f(auVar744,*(undefined1 (*) [64])ptr1);
            auVar722 = vminps_avx512f(auVar722,(undefined1  [64])afVar408);
            auVar722 = vmaxps_avx512f(auVar722,(undefined1  [64])afVar409);
            auVar723 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar722,in_ZMM3);
            auVar724 = vrndscaleps_avx512f(auVar723,1);
            uVar47 = vcmpps_avx512f(auVar723,auVar724,1);
            auVar723 = vsubps_avx512f(auVar724,(undefined1  [64])afVar407);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar745._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar724._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar745._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar724._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar745._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar724._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar745._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar724._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar745._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar724._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar745._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar724._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar745._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar724._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar745._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar724._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            auVar745._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar724._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar745._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar724._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar745._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar724._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar745._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar724._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar745._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar724._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar745._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar724._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar745._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar724._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar745._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar724._60_4_;
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar745,auVar720);
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar745,auVar716);
            auVar723 = vfmadd213ps_avx512f(auVar722,(undefined1  [64])afVar411,
                                           (undefined1  [64])afVar412);
            auVar724 = vmulps_avx512f(auVar722,auVar722);
            auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar413);
            auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar414);
            auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar415);
            auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,in_ZMM3);
            auVar722 = vfmadd213ps_avx512f(auVar723,auVar724,auVar722);
            auVar722 = vaddps_avx512f(auVar722,(undefined1  [64])afVar407);
            auVar723 = vcvttps2dq_avx512f(auVar745);
            auVar723 = vpaddd_avx512f(auVar723,auVar734);
            in_ZMM2 = vpslld_avx512f(auVar723,0x17);
            auVar722 = vmulps_avx512f(auVar722,in_ZMM2);
            *(undefined1 (*) [64])outptr = auVar722;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
          auVar442 = auVar519;
          auVar674 = auVar678;
        }
        auVar460 = auVar674._0_16_;
        if ((int)(uVar425 | 7) < (int)uVar427) {
          auVar1192._8_4_ = 0x3f3504f3;
          auVar1192._0_8_ = 0x3f3504f33f3504f3;
          auVar1192._12_4_ = 0x3f3504f3;
          auVar1192._16_4_ = 0x3f3504f3;
          auVar1192._20_4_ = 0x3f3504f3;
          auVar1192._24_4_ = 0x3f3504f3;
          auVar1192._28_4_ = 0x3f3504f3;
          auVar1247._8_4_ = 0xbf800000;
          auVar1247._0_8_ = 0xbf800000bf800000;
          auVar1247._12_4_ = 0xbf800000;
          auVar1247._16_4_ = 0xbf800000;
          auVar1247._20_4_ = 0xbf800000;
          auVar1247._24_4_ = 0xbf800000;
          auVar1247._28_4_ = 0xbf800000;
          auVar1309._8_4_ = 0x3f800000;
          auVar1309._0_8_ = 0x3f8000003f800000;
          auVar1309._12_4_ = 0x3f800000;
          auVar1309._16_4_ = 0x3f800000;
          auVar1309._20_4_ = 0x3f800000;
          auVar1309._24_4_ = 0x3f800000;
          auVar1309._28_4_ = 0x3f800000;
          auVar1368._8_4_ = 0x3d9021bb;
          auVar1368._0_8_ = 0x3d9021bb3d9021bb;
          auVar1368._12_4_ = 0x3d9021bb;
          auVar1368._16_4_ = 0x3d9021bb;
          auVar1368._20_4_ = 0x3d9021bb;
          auVar1368._24_4_ = 0x3d9021bb;
          auVar1368._28_4_ = 0x3d9021bb;
          auVar1424._8_4_ = 0xbdebd1b8;
          auVar1424._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar1424._12_4_ = 0xbdebd1b8;
          auVar1424._16_4_ = 0xbdebd1b8;
          auVar1424._20_4_ = 0xbdebd1b8;
          auVar1424._24_4_ = 0xbdebd1b8;
          auVar1424._28_4_ = 0xbdebd1b8;
          auVar1478._8_4_ = 0x3def251a;
          auVar1478._0_8_ = 0x3def251a3def251a;
          auVar1478._12_4_ = 0x3def251a;
          auVar1478._16_4_ = 0x3def251a;
          auVar1478._20_4_ = 0x3def251a;
          auVar1478._24_4_ = 0x3def251a;
          auVar1478._28_4_ = 0x3def251a;
          auVar1532._8_4_ = 0xbdfe5d4f;
          auVar1532._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar1532._12_4_ = 0xbdfe5d4f;
          auVar1532._16_4_ = 0xbdfe5d4f;
          auVar1532._20_4_ = 0xbdfe5d4f;
          auVar1532._24_4_ = 0xbdfe5d4f;
          auVar1532._28_4_ = 0xbdfe5d4f;
          auVar1586._8_4_ = 0x3e11e9bf;
          auVar1586._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar1586._12_4_ = 0x3e11e9bf;
          auVar1586._16_4_ = 0x3e11e9bf;
          auVar1586._20_4_ = 0x3e11e9bf;
          auVar1586._24_4_ = 0x3e11e9bf;
          auVar1586._28_4_ = 0x3e11e9bf;
          auVar1640._8_4_ = 0xbe2aae50;
          auVar1640._0_8_ = 0xbe2aae50be2aae50;
          auVar1640._12_4_ = 0xbe2aae50;
          auVar1640._16_4_ = 0xbe2aae50;
          auVar1640._20_4_ = 0xbe2aae50;
          auVar1640._24_4_ = 0xbe2aae50;
          auVar1640._28_4_ = 0xbe2aae50;
          auVar1694._8_4_ = 0x3e4cceac;
          auVar1694._0_8_ = 0x3e4cceac3e4cceac;
          auVar1694._12_4_ = 0x3e4cceac;
          auVar1694._16_4_ = 0x3e4cceac;
          auVar1694._20_4_ = 0x3e4cceac;
          auVar1694._24_4_ = 0x3e4cceac;
          auVar1694._28_4_ = 0x3e4cceac;
          auVar1747._8_4_ = 0xbe7ffffc;
          auVar1747._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar1747._12_4_ = 0xbe7ffffc;
          auVar1747._16_4_ = 0xbe7ffffc;
          auVar1747._20_4_ = 0xbe7ffffc;
          auVar1747._24_4_ = 0xbe7ffffc;
          auVar1747._28_4_ = 0xbe7ffffc;
          auVar1797._8_4_ = 0x3eaaaaaa;
          auVar1797._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar1797._12_4_ = 0x3eaaaaaa;
          auVar1797._16_4_ = 0x3eaaaaaa;
          auVar1797._20_4_ = 0x3eaaaaaa;
          auVar1797._24_4_ = 0x3eaaaaaa;
          auVar1797._28_4_ = 0x3eaaaaaa;
          auVar677 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar678 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar442 = vxorps_avx512vl(auVar442,auVar442);
          auVar674 = vpcmpeqd_avx2(auVar674,auVar674);
          auVar460 = auVar674._0_16_;
          auVar679 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar680 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar683 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar684 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar685 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar701 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar565 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar566 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar567 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          uVar882 = uVar425;
          do {
            auVar254._8_4_ = 0x800000;
            auVar254._0_8_ = 0x80000000800000;
            auVar254._12_4_ = 0x800000;
            auVar254._16_4_ = 0x800000;
            auVar254._20_4_ = 0x800000;
            auVar254._24_4_ = 0x800000;
            auVar254._28_4_ = 0x800000;
            auVar568 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar254);
            auVar569 = vpsrld_avx512vl(auVar568,0x17);
            auVar981._8_4_ = 0x807fffff;
            auVar981._0_8_ = 0x807fffff807fffff;
            auVar981._12_4_ = 0x807fffff;
            auVar981._16_4_ = 0x807fffff;
            auVar981._20_4_ = 0x807fffff;
            auVar981._24_4_ = 0x807fffff;
            auVar981._28_4_ = 0x807fffff;
            auVar255._8_4_ = 0x3f000000;
            auVar255._0_8_ = 0x3f0000003f000000;
            auVar255._12_4_ = 0x3f000000;
            auVar255._16_4_ = 0x3f000000;
            auVar255._20_4_ = 0x3f000000;
            auVar255._24_4_ = 0x3f000000;
            auVar255._28_4_ = 0x3f000000;
            auVar568 = vpternlogd_avx512vl(auVar568,auVar981,auVar255,0xea);
            uVar47 = vcmpps_avx512vl(auVar568,auVar1192,1);
            auVar570 = vaddps_avx512vl(auVar568,auVar1247);
            auVar568 = vaddps_avx512vl(auVar570,auVar568);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar574._0_4_ = (float)((uint)bVar12 * auVar568._0_4_ | (uint)!bVar12 * auVar570._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar574._4_4_ = (float)((uint)bVar12 * auVar568._4_4_ | (uint)!bVar12 * auVar570._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar574._8_4_ = (float)((uint)bVar12 * auVar568._8_4_ | (uint)!bVar12 * auVar570._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar574._12_4_ =
                 (float)((uint)bVar12 * auVar568._12_4_ | (uint)!bVar12 * auVar570._12_4_);
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar574._16_4_ =
                 (float)((uint)bVar12 * auVar568._16_4_ | (uint)!bVar12 * auVar570._16_4_);
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar574._20_4_ =
                 (float)((uint)bVar12 * auVar568._20_4_ | (uint)!bVar12 * auVar570._20_4_);
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar574._24_4_ =
                 (float)((uint)bVar12 * auVar568._24_4_ | (uint)!bVar12 * auVar570._24_4_);
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar574._28_4_ = (uint)bVar12 * auVar568._28_4_ | (uint)!bVar12 * auVar570._28_4_;
            auVar568 = vfmadd213ps_avx512vl(auVar1368,auVar574,auVar1424);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar574,auVar1478);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar574,auVar1532);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar574,auVar1586);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar574,auVar1640);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar574,auVar1694);
            auVar1108._0_4_ = auVar574._0_4_ * auVar574._0_4_;
            auVar1108._4_4_ = auVar574._4_4_ * auVar574._4_4_;
            auVar1108._8_4_ = auVar574._8_4_ * auVar574._8_4_;
            auVar1108._12_4_ = auVar574._12_4_ * auVar574._12_4_;
            auVar1108._16_4_ = auVar574._16_4_ * auVar574._16_4_;
            auVar1108._20_4_ = auVar574._20_4_ * auVar574._20_4_;
            auVar1108._28_36_ = in_ZMM2._28_36_;
            auVar1108._24_4_ = auVar574._24_4_ * auVar574._24_4_;
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar574,auVar1747);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar574,auVar1797);
            auVar1159._0_4_ = auVar1108._0_4_ * auVar574._0_4_;
            auVar1159._4_4_ = auVar1108._4_4_ * auVar574._4_4_;
            auVar1159._8_4_ = auVar1108._8_4_ * auVar574._8_4_;
            auVar1159._12_4_ = auVar1108._12_4_ * auVar574._12_4_;
            auVar1159._16_4_ = auVar1108._16_4_ * auVar574._16_4_;
            auVar1159._20_4_ = auVar1108._20_4_ * auVar574._20_4_;
            auVar1159._28_36_ = in_ZMM3._28_36_;
            auVar1159._24_4_ = auVar1108._24_4_ * auVar574._24_4_;
            auVar568 = vmulps_avx512vl(auVar1159._0_32_,auVar568);
            auVar256._8_4_ = 0xffffff82;
            auVar256._0_8_ = 0xffffff82ffffff82;
            auVar256._12_4_ = 0xffffff82;
            auVar256._16_4_ = 0xffffff82;
            auVar256._20_4_ = 0xffffff82;
            auVar256._24_4_ = 0xffffff82;
            auVar256._28_4_ = 0xffffff82;
            auVar569 = vpaddd_avx512vl(auVar569,auVar256);
            auVar569 = vcvtdq2ps_avx512vl(auVar569);
            auVar570 = vsubps_avx512vl(auVar569,auVar1309);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar575._0_4_ = (uint)bVar12 * auVar570._0_4_ | (uint)!bVar12 * auVar569._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar575._4_4_ = (uint)bVar12 * auVar570._4_4_ | (uint)!bVar12 * auVar569._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar575._8_4_ = (uint)bVar12 * auVar570._8_4_ | (uint)!bVar12 * auVar569._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar575._12_4_ = (uint)bVar12 * auVar570._12_4_ | (uint)!bVar12 * auVar569._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar575._16_4_ = (uint)bVar12 * auVar570._16_4_ | (uint)!bVar12 * auVar569._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar575._20_4_ = (uint)bVar12 * auVar570._20_4_ | (uint)!bVar12 * auVar569._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar575._24_4_ = (uint)bVar12 * auVar570._24_4_ | (uint)!bVar12 * auVar569._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar575._28_4_ = (uint)bVar12 * auVar570._28_4_ | (uint)!bVar12 * auVar569._28_4_;
            auVar568 = vfmadd231ps_avx512vl(auVar568,auVar575,auVar677);
            auVar568 = vfmsub231ps_avx512vl(auVar568,auVar678,auVar1108._0_32_);
            auVar568 = vsubps_avx(auVar568,auVar574);
            auVar568 = vfmsub231ps_avx512vl(auVar568,auVar562,auVar575);
            uVar47 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                                     ZEXT1632(auVar442),2);
            bVar12 = (bool)((byte)uVar47 & 1);
            bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar47 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar47 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar47 >> 6) & 1);
            bVar19 = SUB81(uVar47 >> 7,0);
            auVar370._4_4_ =
                 (float)((uint)bVar13 * auVar674._4_4_ | (uint)!bVar13 * auVar568._4_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 4);
            auVar370._0_4_ =
                 (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar568._0_4_) *
                 *(float *)*(undefined1 (*) [64])ptr1;
            auVar370._8_4_ =
                 (float)((uint)bVar14 * auVar674._8_4_ | (uint)!bVar14 * auVar568._8_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 8);
            auVar370._12_4_ =
                 (float)((uint)bVar15 * auVar674._12_4_ | (uint)!bVar15 * auVar568._12_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
            auVar370._16_4_ =
                 (float)((uint)bVar16 * auVar674._16_4_ | (uint)!bVar16 * auVar568._16_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 0x10);
            auVar370._20_4_ =
                 (float)((uint)bVar17 * auVar674._20_4_ | (uint)!bVar17 * auVar568._20_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 0x14);
            auVar370._24_4_ =
                 (float)((uint)bVar18 * auVar674._24_4_ | (uint)!bVar18 * auVar568._24_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 0x18);
            auVar370._28_4_ = (uint)bVar19 * auVar674._28_4_ | (uint)!bVar19 * auVar568._28_4_;
            auVar568 = vminps_avx512vl(auVar370,auVar679);
            auVar569 = vmaxps_avx512vl(auVar568,auVar680);
            auVar570 = vfmadd231ps_avx512vl(auVar678,auVar569,auVar683);
            auVar568 = vroundps_avx(auVar570,1);
            uVar47 = vcmpps_avx512vl(auVar570,auVar568,1);
            auVar570 = vsubps_avx512vl(auVar568,auVar1309);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar576._0_4_ = (float)((uint)bVar12 * auVar570._0_4_ | (uint)!bVar12 * auVar568._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar576._4_4_ = (float)((uint)bVar12 * auVar570._4_4_ | (uint)!bVar12 * auVar568._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar576._8_4_ = (float)((uint)bVar12 * auVar570._8_4_ | (uint)!bVar12 * auVar568._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar576._12_4_ =
                 (float)((uint)bVar12 * auVar570._12_4_ | (uint)!bVar12 * auVar568._12_4_);
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar576._16_4_ =
                 (float)((uint)bVar12 * auVar570._16_4_ | (uint)!bVar12 * auVar568._16_4_);
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar576._20_4_ =
                 (float)((uint)bVar12 * auVar570._20_4_ | (uint)!bVar12 * auVar568._20_4_);
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar576._24_4_ =
                 (float)((uint)bVar12 * auVar570._24_4_ | (uint)!bVar12 * auVar568._24_4_);
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar576._28_4_ =
                 (float)((uint)bVar12 * auVar570._28_4_ | (uint)!bVar12 * auVar568._28_4_);
            in_ZMM3 = ZEXT3264(auVar576);
            auVar568 = vfmsub231ps_avx512vl(auVar569,auVar576,auVar562);
            auVar568 = vfnmsub231ps_avx512vl(auVar568,auVar576,auVar677);
            auVar569 = vfmadd213ps_avx512vl(auVar684,auVar568,auVar685);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar701);
            auVar570 = vmulps_avx512vl(auVar568,auVar568);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar565);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar566);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar678);
            auVar568 = vfmadd213ps_avx512vl(auVar569,auVar570,auVar568);
            in_ZMM2 = ZEXT3264(auVar568);
            auVar982._0_4_ = (int)auVar576._0_4_;
            auVar982._4_4_ = (int)auVar576._4_4_;
            auVar982._8_4_ = (int)auVar576._8_4_;
            auVar982._12_4_ = (int)auVar576._12_4_;
            auVar982._16_4_ = (int)auVar576._16_4_;
            auVar982._20_4_ = (int)auVar576._20_4_;
            auVar982._24_4_ = (int)auVar576._24_4_;
            auVar982._28_4_ = (int)auVar576._28_4_;
            auVar569 = vpslld_avx2(auVar982,0x17);
            auVar569 = vpaddd_avx512vl(auVar569,auVar567);
            auVar461 = vfmadd213ps_fma(auVar569,auVar568,auVar569);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar461);
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)(uVar425 | 3) < (int)uVar427) {
          auVar1112._8_4_ = 0xffffff82;
          auVar1112._0_8_ = 0xffffff82ffffff82;
          auVar1112._12_4_ = 0xffffff82;
          auVar1164._8_4_ = 0x3f3504f3;
          auVar1164._0_8_ = 0x3f3504f33f3504f3;
          auVar1164._12_4_ = 0x3f3504f3;
          auVar1218._8_4_ = 0xbf800000;
          auVar1218._0_8_ = 0xbf800000bf800000;
          auVar1218._12_4_ = 0xbf800000;
          auVar1282._8_4_ = 0x3f800000;
          auVar1282._0_8_ = 0x3f8000003f800000;
          auVar1282._12_4_ = 0x3f800000;
          auVar1345._8_4_ = 0x3d9021bb;
          auVar1345._0_8_ = 0x3d9021bb3d9021bb;
          auVar1345._12_4_ = 0x3d9021bb;
          auVar1401._8_4_ = 0xbdebd1b8;
          auVar1401._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar1401._12_4_ = 0xbdebd1b8;
          auVar1455._8_4_ = 0x3def251a;
          auVar1455._0_8_ = 0x3def251a3def251a;
          auVar1455._12_4_ = 0x3def251a;
          auVar1509._8_4_ = 0xbdfe5d4f;
          auVar1509._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar1509._12_4_ = 0xbdfe5d4f;
          auVar1563._8_4_ = 0x3e11e9bf;
          auVar1563._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar1563._12_4_ = 0x3e11e9bf;
          auVar1617._8_4_ = 0xbe2aae50;
          auVar1617._0_8_ = 0xbe2aae50be2aae50;
          auVar1617._12_4_ = 0xbe2aae50;
          auVar1671._8_4_ = 0x3e4cceac;
          auVar1671._0_8_ = 0x3e4cceac3e4cceac;
          auVar1671._12_4_ = 0x3e4cceac;
          auVar1725._8_4_ = 0xbe7ffffc;
          auVar1725._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar1725._12_4_ = 0xbe7ffffc;
          auVar1777._8_4_ = 0x3eaaaaaa;
          auVar1777._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar1777._12_4_ = 0x3eaaaaaa;
          auVar461 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar519 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar472 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar464 = vxorps_avx512vl(auVar442,auVar442);
          auVar442 = vpcmpeqd_avx(auVar460,auVar460);
          auVar460 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar465 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar466 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar469 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar470 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar523 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar443 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar445 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          uVar882 = uVar425;
          do {
            auVar116._8_4_ = 0x800000;
            auVar116._0_8_ = 0x80000000800000;
            auVar116._12_4_ = 0x800000;
            auVar446 = vmaxps_avx512vl(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar116);
            auVar447 = vpsrld_avx512vl(auVar446,0x17);
            auVar939._8_4_ = 0x807fffff;
            auVar939._0_8_ = 0x807fffff807fffff;
            auVar939._12_4_ = 0x807fffff;
            auVar117._8_4_ = 0x3f000000;
            auVar117._0_8_ = 0x3f0000003f000000;
            auVar117._12_4_ = 0x3f000000;
            auVar446 = vpternlogd_avx512vl(auVar446,auVar939,auVar117,0xea);
            uVar47 = vcmpps_avx512vl(auVar446,auVar1164,1);
            auVar439 = vaddps_avx512vl(auVar446,auVar1218);
            auVar446 = vaddps_avx512vl(auVar439,auVar446);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar451._0_4_ = (uint)bVar12 * auVar446._0_4_ | (uint)!bVar12 * auVar439._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar451._4_4_ = (uint)bVar12 * auVar446._4_4_ | (uint)!bVar12 * auVar439._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar451._8_4_ = (uint)bVar12 * auVar446._8_4_ | (uint)!bVar12 * auVar439._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar451._12_4_ = (uint)bVar12 * auVar446._12_4_ | (uint)!bVar12 * auVar439._12_4_;
            auVar446 = vfmadd213ps_avx512vl(auVar1345,auVar451,auVar1401);
            auVar446 = vfmadd213ps_avx512vl(auVar446,auVar451,auVar1455);
            auVar446 = vfmadd213ps_avx512vl(auVar446,auVar451,auVar1509);
            uVar430 = vcmpps_avx512vl(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar464,2);
            auVar446 = vfmadd213ps_avx512vl(auVar446,auVar451,auVar1563);
            auVar446 = vfmadd213ps_avx512vl(auVar446,auVar451,auVar1617);
            auVar446 = vfmadd213ps_avx512vl(auVar446,auVar451,auVar1671);
            auVar439 = vmulps_avx512vl(auVar451,auVar451);
            auVar446 = vfmadd213ps_avx512vl(auVar446,auVar451,auVar1725);
            auVar446 = vfmadd213ps_avx512vl(auVar446,auVar451,auVar1777);
            auVar440 = vmulps_avx512vl(auVar439,auVar451);
            auVar446 = vmulps_avx512vl(auVar440,auVar446);
            auVar447 = vpaddd_avx512vl(auVar447,auVar1112);
            auVar447 = vcvtdq2ps_avx512vl(auVar447);
            auVar440 = vsubps_avx512vl(auVar447,auVar1282);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar452._0_4_ = (uint)bVar12 * auVar440._0_4_ | (uint)!bVar12 * auVar447._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar452._4_4_ = (uint)bVar12 * auVar440._4_4_ | (uint)!bVar12 * auVar447._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar452._8_4_ = (uint)bVar12 * auVar440._8_4_ | (uint)!bVar12 * auVar447._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar452._12_4_ = (uint)bVar12 * auVar440._12_4_ | (uint)!bVar12 * auVar447._12_4_;
            auVar446 = vfmadd231ps_avx512vl(auVar446,auVar452,auVar461);
            auVar446 = vfmsub231ps_avx512vl(auVar446,auVar519,auVar439);
            auVar446 = vsubps_avx(auVar446,auVar451);
            auVar446 = vfmsub231ps_avx512vl(auVar446,auVar472,auVar452);
            bVar12 = (bool)((byte)uVar430 & 1);
            bVar13 = (bool)((byte)(uVar430 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar430 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar940._0_4_ =
                 (float)((uint)bVar12 * auVar442._0_4_ | (uint)!bVar12 * auVar446._0_4_) *
                 *(float *)*(undefined1 (*) [64])ptr1;
            auVar940._4_4_ =
                 (float)((uint)bVar13 * auVar442._4_4_ | (uint)!bVar13 * auVar446._4_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 4);
            auVar940._8_4_ =
                 (float)((uint)bVar14 * auVar442._8_4_ | (uint)!bVar14 * auVar446._8_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 8);
            auVar940._12_4_ =
                 (float)((uint)bVar15 * auVar442._12_4_ | (uint)!bVar15 * auVar446._12_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
            auVar446 = vminps_avx512vl(auVar940,auVar460);
            auVar446 = vmaxps_avx512vl(auVar446,auVar465);
            auVar447 = vfmadd231ps_avx512vl(auVar519,auVar446,auVar466);
            auVar439 = vcvttps2dq_avx512vl(auVar447);
            auVar439 = vcvtdq2ps_avx512vl(auVar439);
            uVar47 = vcmpps_avx512vl(auVar447,auVar439,1);
            auVar447 = vsubps_avx512vl(auVar439,auVar1282);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar453._0_4_ = (uint)bVar12 * auVar447._0_4_ | (uint)!bVar12 * auVar439._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar453._4_4_ = (uint)bVar12 * auVar447._4_4_ | (uint)!bVar12 * auVar439._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar453._8_4_ = (uint)bVar12 * auVar447._8_4_ | (uint)!bVar12 * auVar439._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar453._12_4_ = (uint)bVar12 * auVar447._12_4_ | (uint)!bVar12 * auVar439._12_4_;
            auVar446 = vfmsub231ps_avx512vl(auVar446,auVar453,auVar472);
            auVar446 = vfnmsub231ps_avx512vl(auVar446,auVar453,auVar461);
            auVar447 = vfmadd213ps_avx512vl(auVar469,auVar446,auVar470);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar523);
            auVar439 = vmulps_avx512vl(auVar446,auVar446);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar443);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar444);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar519);
            auVar446 = vfmadd213ps_avx512vl(auVar447,auVar439,auVar446);
            auVar447 = vcvttps2dq_avx512vl(auVar453);
            auVar447 = vpslld_avx(auVar447,0x17);
            auVar447 = vpaddd_avx512vl(auVar447,auVar445);
            auVar446 = vfmadd213ps_fma(auVar447,auVar446,auVar447);
            *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar446;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
            uVar425 = uVar882 + 4;
            iVar424 = uVar882 + 7;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          return;
        }
        lVar428 = 0;
        do {
          fVar890 = powf(*(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4),
                         *(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4));
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = fVar890;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (bw == 1) {
        fVar890 = *ptr1;
        if (iVar424 == 4) {
          auVar950 = *(undefined1 (*) [16])ptr1;
        }
        else {
          auVar950._4_4_ = fVar890;
          auVar950._0_4_ = fVar890;
          auVar950._8_4_ = fVar890;
          auVar950._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1091 = *(undefined1 (*) [32])ptr1;
        }
        else {
          auVar1091._16_16_ = auVar950;
          auVar1091._0_16_ = auVar950;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr1;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1091),auVar1091,1);
        }
        uVar425 = 0;
        auVar442 = ZEXT416((uint)fVar890);
        auVar674 = ZEXT1632(auVar950);
        if (0xf < (int)uVar427) {
          auVar716 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar717 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar718 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar719 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
          auVar720 = vpxord_avx512f(auVar716,auVar718);
          auVar721 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
          auVar460 = auVar721._0_16_;
          auVar722 = vpxord_avx512f(auVar721,auVar718);
          auVar723 = vpxord_avx512f(auVar719,auVar718);
          iVar424 = 0xf;
          auVar442 = vxorps_avx512vl(auVar466,auVar466);
          auVar718 = vpternlogd_avx512f(auVar718,auVar718,auVar718,0xff);
          do {
            auVar724 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,
                                      (undefined1  [64])_ps512_min_norm_pos);
            auVar725 = vpsrld_avx512f(auVar724,0x17);
            auVar724 = vpternlogd_avx512f(auVar724,auVar716,(undefined1  [64])_ps512_inv_mant_mask,
                                          0xec);
            uVar47 = vcmpps_avx512f(auVar724,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar726 = vsubps_avx512f(auVar724,(undefined1  [64])afVar407);
            auVar724 = vaddps_avx512f(auVar726,auVar724);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar860._0_4_ = (uint)bVar12 * auVar724._0_4_ | (uint)!bVar12 * auVar726._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar860._4_4_ = (uint)bVar12 * auVar724._4_4_ | (uint)!bVar12 * auVar726._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar860._8_4_ = (uint)bVar12 * auVar724._8_4_ | (uint)!bVar12 * auVar726._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar860._12_4_ = (uint)bVar12 * auVar724._12_4_ | (uint)!bVar12 * auVar726._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar860._16_4_ = (uint)bVar12 * auVar724._16_4_ | (uint)!bVar12 * auVar726._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar860._20_4_ = (uint)bVar12 * auVar724._20_4_ | (uint)!bVar12 * auVar726._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar860._24_4_ = (uint)bVar12 * auVar724._24_4_ | (uint)!bVar12 * auVar726._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar860._28_4_ = (uint)bVar12 * auVar724._28_4_ | (uint)!bVar12 * auVar726._28_4_;
            bVar29 = (byte)(uVar47 >> 8);
            bVar12 = (bool)(bVar29 & 1);
            auVar860._32_4_ = (uint)bVar12 * auVar724._32_4_ | (uint)!bVar12 * auVar726._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar860._36_4_ = (uint)bVar12 * auVar724._36_4_ | (uint)!bVar12 * auVar726._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar860._40_4_ = (uint)bVar12 * auVar724._40_4_ | (uint)!bVar12 * auVar726._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar860._44_4_ = (uint)bVar12 * auVar724._44_4_ | (uint)!bVar12 * auVar726._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar860._48_4_ = (uint)bVar12 * auVar724._48_4_ | (uint)!bVar12 * auVar726._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar860._52_4_ = (uint)bVar12 * auVar724._52_4_ | (uint)!bVar12 * auVar726._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar860._56_4_ = (uint)bVar12 * auVar724._56_4_ | (uint)!bVar12 * auVar726._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar860._60_4_ = (uint)bVar12 * auVar724._60_4_ | (uint)!bVar12 * auVar726._60_4_;
            auVar724 = vfmadd132ps_avx512f(auVar860,(undefined1  [64])_ps512_cephes_log_p1,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar724 = vfmadd213ps_avx512f(auVar724,auVar860,(undefined1  [64])afVar417);
            auVar724 = vfmadd213ps_avx512f(auVar724,auVar860,(undefined1  [64])afVar418);
            auVar726 = vmulps_avx512f(auVar860,auVar860);
            auVar724 = vfmadd213ps_avx512f(auVar724,auVar860,(undefined1  [64])afVar419);
            auVar724 = vfmadd213ps_avx512f(auVar724,auVar860,(undefined1  [64])afVar420);
            auVar724 = vfmadd213ps_avx512f(auVar724,auVar860,(undefined1  [64])afVar421);
            auVar724 = vfmadd213ps_avx512f(auVar724,auVar860,(undefined1  [64])afVar422);
            auVar724 = vfmadd213ps_avx512f(auVar724,auVar860,(undefined1  [64])afVar423);
            auVar727 = vmulps_avx512f(auVar726,auVar860);
            auVar724 = vfmadd213ps_avx512f(auVar727,auVar724,auVar860);
            auVar725 = vpsubd_avx512f(auVar725,auVar717);
            auVar725 = vcvtdq2ps_avx512f(auVar725);
            auVar727 = vaddps_avx512f(auVar725,(undefined1  [64])afVar407);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar861._0_4_ = (uint)bVar12 * auVar725._0_4_ | (uint)!bVar12 * auVar727._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar861._4_4_ = (uint)bVar12 * auVar725._4_4_ | (uint)!bVar12 * auVar727._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar861._8_4_ = (uint)bVar12 * auVar725._8_4_ | (uint)!bVar12 * auVar727._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar861._12_4_ = (uint)bVar12 * auVar725._12_4_ | (uint)!bVar12 * auVar727._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar861._16_4_ = (uint)bVar12 * auVar725._16_4_ | (uint)!bVar12 * auVar727._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar861._20_4_ = (uint)bVar12 * auVar725._20_4_ | (uint)!bVar12 * auVar727._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar861._24_4_ = (uint)bVar12 * auVar725._24_4_ | (uint)!bVar12 * auVar727._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar861._28_4_ = (uint)bVar12 * auVar725._28_4_ | (uint)!bVar12 * auVar727._28_4_;
            bVar12 = (bool)(bVar29 & 1);
            auVar861._32_4_ = (uint)bVar12 * auVar725._32_4_ | (uint)!bVar12 * auVar727._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar861._36_4_ = (uint)bVar12 * auVar725._36_4_ | (uint)!bVar12 * auVar727._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar861._40_4_ = (uint)bVar12 * auVar725._40_4_ | (uint)!bVar12 * auVar727._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar861._44_4_ = (uint)bVar12 * auVar725._44_4_ | (uint)!bVar12 * auVar727._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar861._48_4_ = (uint)bVar12 * auVar725._48_4_ | (uint)!bVar12 * auVar727._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar861._52_4_ = (uint)bVar12 * auVar725._52_4_ | (uint)!bVar12 * auVar727._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar861._56_4_ = (uint)bVar12 * auVar725._56_4_ | (uint)!bVar12 * auVar727._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar861._60_4_ = (uint)bVar12 * auVar725._60_4_ | (uint)!bVar12 * auVar727._60_4_;
            uVar47 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar442),2);
            auVar724 = vfmadd231ps_avx512f(auVar724,auVar861,auVar719);
            auVar724 = vfmadd231ps_avx512f(auVar724,auVar720,auVar726);
            auVar724 = vfmadd231ps_avx512f(auVar724,auVar721,auVar861);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar862._0_4_ = (uint)bVar12 * auVar718._0_4_ | (uint)!bVar12 * auVar724._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar862._4_4_ = (uint)bVar12 * auVar718._4_4_ | (uint)!bVar12 * auVar724._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar862._8_4_ = (uint)bVar12 * auVar718._8_4_ | (uint)!bVar12 * auVar724._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar862._12_4_ = (uint)bVar12 * auVar718._12_4_ | (uint)!bVar12 * auVar724._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar862._16_4_ = (uint)bVar12 * auVar718._16_4_ | (uint)!bVar12 * auVar724._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar862._20_4_ = (uint)bVar12 * auVar718._20_4_ | (uint)!bVar12 * auVar724._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar862._24_4_ = (uint)bVar12 * auVar718._24_4_ | (uint)!bVar12 * auVar724._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar862._28_4_ = (uint)bVar12 * auVar718._28_4_ | (uint)!bVar12 * auVar724._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            auVar862._32_4_ = (uint)bVar12 * auVar718._32_4_ | (uint)!bVar12 * auVar724._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar862._36_4_ = (uint)bVar12 * auVar718._36_4_ | (uint)!bVar12 * auVar724._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar862._40_4_ = (uint)bVar12 * auVar718._40_4_ | (uint)!bVar12 * auVar724._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar862._44_4_ = (uint)bVar12 * auVar718._44_4_ | (uint)!bVar12 * auVar724._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar862._48_4_ = (uint)bVar12 * auVar718._48_4_ | (uint)!bVar12 * auVar724._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar862._52_4_ = (uint)bVar12 * auVar718._52_4_ | (uint)!bVar12 * auVar724._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar862._56_4_ = (uint)bVar12 * auVar718._56_4_ | (uint)!bVar12 * auVar724._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar862._60_4_ = (uint)bVar12 * auVar718._60_4_ | (uint)!bVar12 * auVar724._60_4_;
            auVar724 = vmulps_avx512f(auVar862,auVar734);
            auVar724 = vminps_avx512f(auVar724,(undefined1  [64])afVar408);
            auVar724 = vmaxps_avx512f(auVar724,(undefined1  [64])afVar409);
            auVar725 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar724,auVar716);
            auVar726 = vrndscaleps_avx512f(auVar725,1);
            uVar47 = vcmpps_avx512f(auVar725,auVar726,1);
            auVar725 = vsubps_avx512f(auVar726,(undefined1  [64])afVar407);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar863._0_4_ = (uint)bVar12 * auVar725._0_4_ | (uint)!bVar12 * auVar726._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar863._4_4_ = (uint)bVar12 * auVar725._4_4_ | (uint)!bVar12 * auVar726._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar863._8_4_ = (uint)bVar12 * auVar725._8_4_ | (uint)!bVar12 * auVar726._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar863._12_4_ = (uint)bVar12 * auVar725._12_4_ | (uint)!bVar12 * auVar726._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar863._16_4_ = (uint)bVar12 * auVar725._16_4_ | (uint)!bVar12 * auVar726._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar863._20_4_ = (uint)bVar12 * auVar725._20_4_ | (uint)!bVar12 * auVar726._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar863._24_4_ = (uint)bVar12 * auVar725._24_4_ | (uint)!bVar12 * auVar726._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar863._28_4_ = (uint)bVar12 * auVar725._28_4_ | (uint)!bVar12 * auVar726._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            auVar863._32_4_ = (uint)bVar12 * auVar725._32_4_ | (uint)!bVar12 * auVar726._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar863._36_4_ = (uint)bVar12 * auVar725._36_4_ | (uint)!bVar12 * auVar726._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar863._40_4_ = (uint)bVar12 * auVar725._40_4_ | (uint)!bVar12 * auVar726._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar863._44_4_ = (uint)bVar12 * auVar725._44_4_ | (uint)!bVar12 * auVar726._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar863._48_4_ = (uint)bVar12 * auVar725._48_4_ | (uint)!bVar12 * auVar726._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar863._52_4_ = (uint)bVar12 * auVar725._52_4_ | (uint)!bVar12 * auVar726._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar863._56_4_ = (uint)bVar12 * auVar725._56_4_ | (uint)!bVar12 * auVar726._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar863._60_4_ = (uint)bVar12 * auVar725._60_4_ | (uint)!bVar12 * auVar726._60_4_;
            auVar724 = vfmadd231ps_avx512f(auVar724,auVar863,auVar722);
            auVar724 = vfmadd231ps_avx512f(auVar724,auVar863,auVar723);
            auVar725 = vfmadd213ps_avx512f(auVar724,(undefined1  [64])afVar411,
                                           (undefined1  [64])afVar412);
            auVar725 = vfmadd213ps_avx512f(auVar725,auVar724,(undefined1  [64])afVar413);
            auVar725 = vfmadd213ps_avx512f(auVar725,auVar724,(undefined1  [64])afVar414);
            auVar725 = vfmadd213ps_avx512f(auVar725,auVar724,(undefined1  [64])afVar415);
            auVar726 = vmulps_avx512f(auVar724,auVar724);
            auVar725 = vfmadd213ps_avx512f(auVar725,auVar724,auVar716);
            auVar724 = vfmadd213ps_avx512f(auVar725,auVar726,auVar724);
            auVar725 = vcvttps2dq_avx512f(auVar863);
            in_ZMM5 = vaddps_avx512f(auVar724,(undefined1  [64])afVar407);
            auVar724 = vpaddd_avx512f(auVar725,auVar717);
            auVar724 = vpslld_avx512f(auVar724,0x17);
            in_ZMM4 = vmulps_avx512f(in_ZMM5,auVar724);
            *(undefined1 (*) [64])outptr = in_ZMM4;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
          auVar442 = auVar461;
          auVar674 = auVar677;
        }
        if ((int)(uVar425 | 7) < (int)uVar427) {
          auVar1392._8_4_ = 0xbf800000;
          auVar1392._0_8_ = 0xbf800000bf800000;
          auVar1392._12_4_ = 0xbf800000;
          auVar1392._16_4_ = 0xbf800000;
          auVar1392._20_4_ = 0xbf800000;
          auVar1392._24_4_ = 0xbf800000;
          auVar1392._28_4_ = 0xbf800000;
          auVar1448._8_4_ = 0x3f800000;
          auVar1448._0_8_ = 0x3f8000003f800000;
          auVar1448._12_4_ = 0x3f800000;
          auVar1448._16_4_ = 0x3f800000;
          auVar1448._20_4_ = 0x3f800000;
          auVar1448._24_4_ = 0x3f800000;
          auVar1448._28_4_ = 0x3f800000;
          auVar1502._8_4_ = 0x3d9021bb;
          auVar1502._0_8_ = 0x3d9021bb3d9021bb;
          auVar1502._12_4_ = 0x3d9021bb;
          auVar1502._16_4_ = 0x3d9021bb;
          auVar1502._20_4_ = 0x3d9021bb;
          auVar1502._24_4_ = 0x3d9021bb;
          auVar1502._28_4_ = 0x3d9021bb;
          auVar1556._8_4_ = 0xbdebd1b8;
          auVar1556._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar1556._12_4_ = 0xbdebd1b8;
          auVar1556._16_4_ = 0xbdebd1b8;
          auVar1556._20_4_ = 0xbdebd1b8;
          auVar1556._24_4_ = 0xbdebd1b8;
          auVar1556._28_4_ = 0xbdebd1b8;
          auVar1610._8_4_ = 0x3def251a;
          auVar1610._0_8_ = 0x3def251a3def251a;
          auVar1610._12_4_ = 0x3def251a;
          auVar1610._16_4_ = 0x3def251a;
          auVar1610._20_4_ = 0x3def251a;
          auVar1610._24_4_ = 0x3def251a;
          auVar1610._28_4_ = 0x3def251a;
          auVar1664._8_4_ = 0xbdfe5d4f;
          auVar1664._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar1664._12_4_ = 0xbdfe5d4f;
          auVar1664._16_4_ = 0xbdfe5d4f;
          auVar1664._20_4_ = 0xbdfe5d4f;
          auVar1664._24_4_ = 0xbdfe5d4f;
          auVar1664._28_4_ = 0xbdfe5d4f;
          auVar1718._8_4_ = 0x3e11e9bf;
          auVar1718._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar1718._12_4_ = 0x3e11e9bf;
          auVar1718._16_4_ = 0x3e11e9bf;
          auVar1718._20_4_ = 0x3e11e9bf;
          auVar1718._24_4_ = 0x3e11e9bf;
          auVar1718._28_4_ = 0x3e11e9bf;
          auVar1768._8_4_ = 0xbe2aae50;
          auVar1768._0_8_ = 0xbe2aae50be2aae50;
          auVar1768._12_4_ = 0xbe2aae50;
          auVar1768._16_4_ = 0xbe2aae50;
          auVar1768._20_4_ = 0xbe2aae50;
          auVar1768._24_4_ = 0xbe2aae50;
          auVar1768._28_4_ = 0xbe2aae50;
          auVar1817._8_4_ = 0x3e4cceac;
          auVar1817._0_8_ = 0x3e4cceac3e4cceac;
          auVar1817._12_4_ = 0x3e4cceac;
          auVar1817._16_4_ = 0x3e4cceac;
          auVar1817._20_4_ = 0x3e4cceac;
          auVar1817._24_4_ = 0x3e4cceac;
          auVar1817._28_4_ = 0x3e4cceac;
          auVar677 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar678 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar562 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar679 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar680 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar460 = auVar680._0_16_;
          auVar442 = ZEXT816(0) << 0x40;
          auVar674 = vpcmpeqd_avx2(auVar674,auVar674);
          auVar683 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar684 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar685 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar701 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar565 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar566 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar567 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar568 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar569 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          uVar882 = uVar425;
          do {
            auVar257._8_4_ = 0x800000;
            auVar257._0_8_ = 0x80000000800000;
            auVar257._12_4_ = 0x800000;
            auVar257._16_4_ = 0x800000;
            auVar257._20_4_ = 0x800000;
            auVar257._24_4_ = 0x800000;
            auVar257._28_4_ = 0x800000;
            auVar570 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar257);
            auVar563 = vpsrld_avx512vl(auVar570,0x17);
            auVar1152._8_4_ = 0x807fffff;
            auVar1152._0_8_ = 0x807fffff807fffff;
            auVar1152._12_4_ = 0x807fffff;
            auVar1152._16_4_ = 0x807fffff;
            auVar1152._20_4_ = 0x807fffff;
            auVar1152._24_4_ = 0x807fffff;
            auVar1152._28_4_ = 0x807fffff;
            auVar258._8_4_ = 0x3f000000;
            auVar258._0_8_ = 0x3f0000003f000000;
            auVar258._12_4_ = 0x3f000000;
            auVar258._16_4_ = 0x3f000000;
            auVar258._20_4_ = 0x3f000000;
            auVar258._24_4_ = 0x3f000000;
            auVar258._28_4_ = 0x3f000000;
            auVar570 = vpternlogd_avx512vl(auVar570,auVar1152,auVar258,0xea);
            auVar259._8_4_ = 0x3f3504f3;
            auVar259._0_8_ = 0x3f3504f33f3504f3;
            auVar259._12_4_ = 0x3f3504f3;
            auVar259._16_4_ = 0x3f3504f3;
            auVar259._20_4_ = 0x3f3504f3;
            auVar259._24_4_ = 0x3f3504f3;
            auVar259._28_4_ = 0x3f3504f3;
            uVar47 = vcmpps_avx512vl(auVar570,auVar259,1);
            auVar556 = vaddps_avx512vl(auVar570,auVar1392);
            auVar570 = vaddps_avx512vl(auVar556,auVar570);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar690._0_4_ = (float)((uint)bVar12 * auVar570._0_4_ | (uint)!bVar12 * auVar556._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar690._4_4_ = (float)((uint)bVar12 * auVar570._4_4_ | (uint)!bVar12 * auVar556._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar690._8_4_ = (float)((uint)bVar12 * auVar570._8_4_ | (uint)!bVar12 * auVar556._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar690._12_4_ =
                 (float)((uint)bVar12 * auVar570._12_4_ | (uint)!bVar12 * auVar556._12_4_);
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar690._16_4_ =
                 (float)((uint)bVar12 * auVar570._16_4_ | (uint)!bVar12 * auVar556._16_4_);
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar690._20_4_ =
                 (float)((uint)bVar12 * auVar570._20_4_ | (uint)!bVar12 * auVar556._20_4_);
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar690._24_4_ =
                 (float)((uint)bVar12 * auVar570._24_4_ | (uint)!bVar12 * auVar556._24_4_);
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar690._28_4_ = (uint)bVar12 * auVar570._28_4_ | (uint)!bVar12 * auVar556._28_4_;
            auVar570 = vfmadd213ps_avx512vl(auVar1502,auVar690,auVar1556);
            auVar570 = vfmadd213ps_avx512vl(auVar570,auVar690,auVar1610);
            auVar570 = vfmadd213ps_avx512vl(auVar570,auVar690,auVar1664);
            auVar570 = vfmadd213ps_avx512vl(auVar570,auVar690,auVar1718);
            auVar1215._0_4_ = auVar690._0_4_ * auVar690._0_4_;
            auVar1215._4_4_ = auVar690._4_4_ * auVar690._4_4_;
            auVar1215._8_4_ = auVar690._8_4_ * auVar690._8_4_;
            auVar1215._12_4_ = auVar690._12_4_ * auVar690._12_4_;
            auVar1215._16_4_ = auVar690._16_4_ * auVar690._16_4_;
            auVar1215._20_4_ = auVar690._20_4_ * auVar690._20_4_;
            auVar1215._28_36_ = in_ZMM4._28_36_;
            auVar1215._24_4_ = auVar690._24_4_ * auVar690._24_4_;
            auVar570 = vfmadd213ps_avx512vl(auVar570,auVar690,auVar1768);
            auVar570 = vfmadd213ps_avx512vl(auVar570,auVar690,auVar1817);
            auVar570 = vfmadd213ps_avx512vl(auVar570,auVar690,auVar677);
            auVar570 = vfmadd213ps_avx512vl(auVar570,auVar690,auVar678);
            auVar1279._0_4_ = auVar1215._0_4_ * auVar690._0_4_;
            auVar1279._4_4_ = auVar1215._4_4_ * auVar690._4_4_;
            auVar1279._8_4_ = auVar1215._8_4_ * auVar690._8_4_;
            auVar1279._12_4_ = auVar1215._12_4_ * auVar690._12_4_;
            auVar1279._16_4_ = auVar1215._16_4_ * auVar690._16_4_;
            auVar1279._20_4_ = auVar1215._20_4_ * auVar690._20_4_;
            auVar1279._28_36_ = in_ZMM5._28_36_;
            auVar1279._24_4_ = auVar1215._24_4_ * auVar690._24_4_;
            auVar556 = vmulps_avx512vl(auVar1279._0_32_,auVar570);
            auVar260._8_4_ = 0xffffff82;
            auVar260._0_8_ = 0xffffff82ffffff82;
            auVar260._12_4_ = 0xffffff82;
            auVar260._16_4_ = 0xffffff82;
            auVar260._20_4_ = 0xffffff82;
            auVar260._24_4_ = 0xffffff82;
            auVar260._28_4_ = 0xffffff82;
            auVar570 = vpaddd_avx512vl(auVar563,auVar260);
            auVar570 = vcvtdq2ps_avx(auVar570);
            auVar563 = vsubps_avx512vl(auVar570,auVar1448);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar691._0_4_ = (uint)bVar12 * auVar563._0_4_ | (uint)!bVar12 * auVar570._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar691._4_4_ = (uint)bVar12 * auVar563._4_4_ | (uint)!bVar12 * auVar570._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar691._8_4_ = (uint)bVar12 * auVar563._8_4_ | (uint)!bVar12 * auVar570._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar691._12_4_ = (uint)bVar12 * auVar563._12_4_ | (uint)!bVar12 * auVar570._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar691._16_4_ = (uint)bVar12 * auVar563._16_4_ | (uint)!bVar12 * auVar570._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar691._20_4_ = (uint)bVar12 * auVar563._20_4_ | (uint)!bVar12 * auVar570._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar691._24_4_ = (uint)bVar12 * auVar563._24_4_ | (uint)!bVar12 * auVar570._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar691._28_4_ = (uint)bVar12 * auVar563._28_4_ | (uint)!bVar12 * auVar570._28_4_;
            auVar570 = vfmadd231ps_avx512vl(auVar556,auVar691,auVar562);
            auVar563 = vfmsub231ps_avx512vl(auVar570,auVar679,auVar1215._0_32_);
            uVar47 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                                     ZEXT1632(auVar442),2);
            auVar570 = vsubps_avx(auVar563,auVar690);
            auVar570 = vfmsub231ps_avx512vl(auVar570,auVar680,auVar691);
            bVar12 = (bool)((byte)uVar47 & 1);
            bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar47 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar47 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar389._4_4_ =
                 (float)((uint)bVar13 * auVar674._4_4_ | (uint)!bVar13 * auVar570._4_4_) *
                 auVar1091._4_4_;
            auVar389._0_4_ =
                 (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar570._0_4_) *
                 auVar1091._0_4_;
            auVar389._8_4_ =
                 (float)((uint)bVar14 * auVar674._8_4_ | (uint)!bVar14 * auVar570._8_4_) *
                 auVar1091._8_4_;
            auVar389._12_4_ =
                 (float)((uint)bVar15 * auVar674._12_4_ | (uint)!bVar15 * auVar570._12_4_) *
                 auVar1091._12_4_;
            auVar389._16_4_ =
                 (float)((uint)bVar16 * auVar674._16_4_ | (uint)!bVar16 * auVar570._16_4_) *
                 auVar1091._16_4_;
            auVar389._20_4_ =
                 (float)((uint)bVar17 * auVar674._20_4_ | (uint)!bVar17 * auVar570._20_4_) *
                 auVar1091._20_4_;
            auVar389._24_4_ =
                 (float)((uint)bVar18 * auVar674._24_4_ | (uint)!bVar18 * auVar570._24_4_) *
                 auVar1091._24_4_;
            auVar389._28_4_ = auVar691._28_4_;
            auVar570 = vminps_avx512vl(auVar389,auVar683);
            auVar556 = vmaxps_avx512vl(auVar570,auVar684);
            auVar559 = vfmadd231ps_avx512vl(auVar679,auVar556,auVar685);
            auVar570 = vroundps_avx(auVar559,1);
            uVar47 = vcmpps_avx512vl(auVar559,auVar570,1);
            auVar559 = vsubps_avx512vl(auVar570,auVar1448);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar692._0_4_ = (float)((uint)bVar12 * auVar559._0_4_ | (uint)!bVar12 * auVar570._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar692._4_4_ = (float)((uint)bVar12 * auVar559._4_4_ | (uint)!bVar12 * auVar570._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar692._8_4_ = (float)((uint)bVar12 * auVar559._8_4_ | (uint)!bVar12 * auVar570._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar692._12_4_ =
                 (float)((uint)bVar12 * auVar559._12_4_ | (uint)!bVar12 * auVar570._12_4_);
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar692._16_4_ =
                 (float)((uint)bVar12 * auVar559._16_4_ | (uint)!bVar12 * auVar570._16_4_);
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar692._20_4_ =
                 (float)((uint)bVar12 * auVar559._20_4_ | (uint)!bVar12 * auVar570._20_4_);
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar692._24_4_ =
                 (float)((uint)bVar12 * auVar559._24_4_ | (uint)!bVar12 * auVar570._24_4_);
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar692._28_4_ =
                 (float)((uint)bVar12 * auVar559._28_4_ | (uint)!bVar12 * auVar570._28_4_);
            in_ZMM4 = ZEXT3264(auVar692);
            auVar570 = vfmsub231ps_avx512vl(auVar556,auVar692,auVar680);
            auVar570 = vfnmsub231ps_avx512vl(auVar570,auVar692,auVar562);
            auVar556 = vfmadd213ps_avx512vl(auVar701,auVar570,auVar565);
            auVar390._4_4_ = auVar570._4_4_ * auVar570._4_4_;
            auVar390._0_4_ = auVar570._0_4_ * auVar570._0_4_;
            auVar390._8_4_ = auVar570._8_4_ * auVar570._8_4_;
            auVar390._12_4_ = auVar570._12_4_ * auVar570._12_4_;
            auVar390._16_4_ = auVar570._16_4_ * auVar570._16_4_;
            auVar390._20_4_ = auVar570._20_4_ * auVar570._20_4_;
            auVar390._24_4_ = auVar570._24_4_ * auVar570._24_4_;
            auVar390._28_4_ = auVar563._28_4_;
            in_ZMM5 = ZEXT3264(auVar390);
            auVar563 = vfmadd213ps_avx512vl(auVar556,auVar570,auVar566);
            auVar563 = vfmadd213ps_avx512vl(auVar563,auVar570,auVar567);
            auVar563 = vfmadd213ps_avx512vl(auVar563,auVar570,auVar568);
            auVar563 = vfmadd213ps_avx512vl(auVar563,auVar570,auVar679);
            auVar461 = vfmadd213ps_fma(auVar563,auVar390,auVar570);
            auVar1092._0_4_ = (int)auVar692._0_4_;
            auVar1092._4_4_ = (int)auVar692._4_4_;
            auVar1092._8_4_ = (int)auVar692._8_4_;
            auVar1092._12_4_ = (int)auVar692._12_4_;
            auVar1092._16_4_ = (int)auVar692._16_4_;
            auVar1092._20_4_ = (int)auVar692._20_4_;
            auVar1092._24_4_ = (int)auVar692._24_4_;
            auVar1092._28_4_ = (int)auVar692._28_4_;
            auVar570 = vpslld_avx2(auVar1092,0x17);
            auVar570 = vpaddd_avx512vl(auVar570,auVar569);
            auVar461 = vfmadd213ps_fma(auVar570,ZEXT1632(auVar461),auVar570);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar461);
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)(uVar425 | 3) < (int)uVar427) {
          auVar1288._8_4_ = 0xbf800000;
          auVar1288._0_8_ = 0xbf800000bf800000;
          auVar1288._12_4_ = 0xbf800000;
          auVar1349._8_4_ = 0x3f800000;
          auVar1349._0_8_ = 0x3f8000003f800000;
          auVar1349._12_4_ = 0x3f800000;
          auVar1405._8_4_ = 0x3d9021bb;
          auVar1405._0_8_ = 0x3d9021bb3d9021bb;
          auVar1405._12_4_ = 0x3d9021bb;
          auVar1459._8_4_ = 0xbdebd1b8;
          auVar1459._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar1459._12_4_ = 0xbdebd1b8;
          auVar1513._8_4_ = 0x3def251a;
          auVar1513._0_8_ = 0x3def251a3def251a;
          auVar1513._12_4_ = 0x3def251a;
          auVar1567._8_4_ = 0xbdfe5d4f;
          auVar1567._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar1567._12_4_ = 0xbdfe5d4f;
          auVar1621._8_4_ = 0x3e11e9bf;
          auVar1621._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar1621._12_4_ = 0x3e11e9bf;
          auVar1675._8_4_ = 0xbe2aae50;
          auVar1675._0_8_ = 0xbe2aae50be2aae50;
          auVar1675._12_4_ = 0xbe2aae50;
          auVar1729._8_4_ = 0x3e4cceac;
          auVar1729._0_8_ = 0x3e4cceac3e4cceac;
          auVar1729._12_4_ = 0x3e4cceac;
          auVar1780._8_4_ = 0xbe7ffffc;
          auVar1780._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar1780._12_4_ = 0xbe7ffffc;
          auVar461 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar519 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar472 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar464 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar460 = vxorps_avx512vl(auVar460,auVar460);
          auVar442 = vpcmpeqd_avx(auVar442,auVar442);
          auVar465 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar466 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar469 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar470 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar523 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar443 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar445 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar446 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          local_88 = auVar950._0_4_;
          fStack_84 = auVar950._4_4_;
          fStack_80 = auVar950._8_4_;
          fStack_7c = auVar950._12_4_;
          uVar882 = uVar425;
          do {
            auVar118._8_4_ = 0x800000;
            auVar118._0_8_ = 0x80000000800000;
            auVar118._12_4_ = 0x800000;
            auVar447 = vmaxps_avx512vl(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar118);
            auVar439 = vpsrld_avx512vl(auVar447,0x17);
            auVar1034._8_4_ = 0x807fffff;
            auVar1034._0_8_ = 0x807fffff807fffff;
            auVar1034._12_4_ = 0x807fffff;
            auVar119._8_4_ = 0x3f000000;
            auVar119._0_8_ = 0x3f0000003f000000;
            auVar119._12_4_ = 0x3f000000;
            auVar447 = vpternlogd_avx512vl(auVar447,auVar1034,auVar119,0xea);
            auVar120._8_4_ = 0x3f3504f3;
            auVar120._0_8_ = 0x3f3504f33f3504f3;
            auVar120._12_4_ = 0x3f3504f3;
            uVar47 = vcmpps_avx512vl(auVar447,auVar120,1);
            auVar440 = vaddps_avx512vl(auVar447,auVar1288);
            auVar447 = vaddps_avx512vl(auVar440,auVar447);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar476._0_4_ = (float)((uint)bVar12 * auVar447._0_4_ | (uint)!bVar12 * auVar440._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar476._4_4_ = (float)((uint)bVar12 * auVar447._4_4_ | (uint)!bVar12 * auVar440._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar476._8_4_ = (float)((uint)bVar12 * auVar447._8_4_ | (uint)!bVar12 * auVar440._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar476._12_4_ =
                 (float)((uint)bVar12 * auVar447._12_4_ | (uint)!bVar12 * auVar440._12_4_);
            auVar447 = vfmadd213ps_avx512vl(auVar1405,auVar476,auVar1459);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar476,auVar1513);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar476,auVar1567);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar476,auVar1621);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar476,auVar1675);
            auVar1118._0_4_ = auVar476._0_4_ * auVar476._0_4_;
            auVar1118._4_4_ = auVar476._4_4_ * auVar476._4_4_;
            auVar1118._8_4_ = auVar476._8_4_ * auVar476._8_4_;
            auVar1118._12_4_ = auVar476._12_4_ * auVar476._12_4_;
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar476,auVar1729);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar476,auVar1780);
            auVar1168._0_4_ = auVar1118._0_4_ * auVar476._0_4_;
            auVar1168._4_4_ = auVar1118._4_4_ * auVar476._4_4_;
            auVar1168._8_4_ = auVar1118._8_4_ * auVar476._8_4_;
            auVar1168._12_4_ = auVar1118._12_4_ * auVar476._12_4_;
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar476,auVar461);
            auVar440 = vmulps_avx512vl(auVar1168,auVar447);
            auVar121._8_4_ = 0xffffff82;
            auVar121._0_8_ = 0xffffff82ffffff82;
            auVar121._12_4_ = 0xffffff82;
            auVar447 = vpaddd_avx512vl(auVar439,auVar121);
            auVar447 = vcvtdq2ps_avx(auVar447);
            auVar439 = vsubps_avx512vl(auVar447,auVar1349);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar477._0_4_ = (uint)bVar12 * auVar439._0_4_ | (uint)!bVar12 * auVar447._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar477._4_4_ = (uint)bVar12 * auVar439._4_4_ | (uint)!bVar12 * auVar447._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar477._8_4_ = (uint)bVar12 * auVar439._8_4_ | (uint)!bVar12 * auVar447._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar477._12_4_ = (uint)bVar12 * auVar439._12_4_ | (uint)!bVar12 * auVar447._12_4_;
            auVar447 = vfmadd231ps_avx512vl(auVar440,auVar477,auVar519);
            auVar447 = vfmsub231ps_avx512vl(auVar447,auVar472,auVar1118);
            auVar447 = vsubps_avx(auVar447,auVar476);
            uVar47 = vcmpps_avx512vl(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar460,2);
            auVar447 = vfmsub231ps_avx512vl(auVar447,auVar464,auVar477);
            bVar12 = (bool)((byte)uVar47 & 1);
            bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar951._0_4_ =
                 (float)((uint)bVar12 * auVar442._0_4_ | (uint)!bVar12 * auVar447._0_4_) * local_88;
            auVar951._4_4_ =
                 (float)((uint)bVar13 * auVar442._4_4_ | (uint)!bVar13 * auVar447._4_4_) * fStack_84
            ;
            auVar951._8_4_ =
                 (float)((uint)bVar14 * auVar442._8_4_ | (uint)!bVar14 * auVar447._8_4_) * fStack_80
            ;
            auVar951._12_4_ =
                 (float)((uint)bVar15 * auVar442._12_4_ | (uint)!bVar15 * auVar447._12_4_) *
                 fStack_7c;
            auVar447 = vminps_avx512vl(auVar951,auVar465);
            auVar439 = vmaxps_avx512vl(auVar447,auVar466);
            auVar440 = vfmadd231ps_avx512vl(auVar472,auVar439,auVar469);
            auVar1119._0_4_ = (int)auVar440._0_4_;
            auVar1119._4_4_ = (int)auVar440._4_4_;
            auVar1119._8_4_ = (int)auVar440._8_4_;
            auVar1119._12_4_ = (int)auVar440._12_4_;
            auVar447 = vcvtdq2ps_avx(auVar1119);
            uVar47 = vcmpps_avx512vl(auVar440,auVar447,1);
            auVar440 = vsubps_avx512vl(auVar447,auVar1349);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar478._0_4_ = (float)((uint)bVar12 * auVar440._0_4_ | (uint)!bVar12 * auVar447._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar478._4_4_ = (float)((uint)bVar12 * auVar440._4_4_ | (uint)!bVar12 * auVar447._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar478._8_4_ = (float)((uint)bVar12 * auVar440._8_4_ | (uint)!bVar12 * auVar447._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar478._12_4_ =
                 (float)((uint)bVar12 * auVar440._12_4_ | (uint)!bVar12 * auVar447._12_4_);
            auVar447 = vfmsub231ps_avx512vl(auVar439,auVar478,auVar464);
            auVar447 = vfnmsub231ps_avx512vl(auVar447,auVar478,auVar519);
            auVar439 = vfmadd213ps_avx512vl(auVar470,auVar447,auVar523);
            auVar1169._0_4_ = auVar447._0_4_ * auVar447._0_4_;
            auVar1169._4_4_ = auVar447._4_4_ * auVar447._4_4_;
            auVar1169._8_4_ = auVar447._8_4_ * auVar447._8_4_;
            auVar1169._12_4_ = auVar447._12_4_ * auVar447._12_4_;
            auVar439 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar443);
            auVar439 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar444);
            auVar439 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar445);
            auVar439 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar472);
            auVar447 = vfmadd213ps_fma(auVar439,auVar1169,auVar447);
            auVar952._0_4_ = (int)auVar478._0_4_;
            auVar952._4_4_ = (int)auVar478._4_4_;
            auVar952._8_4_ = (int)auVar478._8_4_;
            auVar952._12_4_ = (int)auVar478._12_4_;
            auVar439 = vpslld_avx(auVar952,0x17);
            auVar439 = vpaddd_avx512vl(auVar439,auVar446);
            auVar447 = vfmadd213ps_fma(auVar439,auVar447,auVar439);
            *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar447;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
            uVar425 = uVar882 + 4;
            iVar424 = uVar882 + 7;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          return;
        }
        lVar428 = 0;
        do {
          fVar891 = powf(*(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4),fVar890);
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = fVar891;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (aw == 1) {
        fVar890 = *ptr;
        if (iVar424 == 4) {
          auVar907 = *(undefined1 (*) [16])ptr;
        }
        else {
          auVar907._4_4_ = fVar890;
          auVar907._0_4_ = fVar890;
          auVar907._8_4_ = fVar890;
          auVar907._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1026 = *(undefined1 (*) [32])ptr;
        }
        else {
          auVar1026._16_16_ = auVar907;
          auVar1026._0_16_ = auVar907;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1026),auVar1026,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          uVar47 = vcmpps_avx512f(auVar734,ZEXT864(0),2);
          auVar734 = vmaxps_avx512f(auVar734,(undefined1  [64])_ps512_min_norm_pos);
          auVar716 = vpsrld_avx512f(auVar734,0x17);
          auVar717 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar734 = vpternlogd_avx512f(auVar734,auVar717,(undefined1  [64])_ps512_inv_mant_mask,
                                        0xec);
          auVar718 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar716 = vpsubd_avx512f(auVar716,auVar718);
          auVar716 = vcvtdq2ps_avx512f(auVar716);
          uVar430 = vcmpps_avx512f(auVar734,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar719 = vsubps_avx512f(auVar734,(undefined1  [64])::_ps512_1);
          auVar720 = vaddps_avx512f(auVar716,(undefined1  [64])::_ps512_1);
          bVar12 = (bool)((byte)uVar430 & 1);
          auVar874._0_4_ = (uint)bVar12 * auVar716._0_4_ | (uint)!bVar12 * auVar720._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar874._4_4_ = (uint)bVar12 * auVar716._4_4_ | (uint)!bVar12 * auVar720._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar874._8_4_ = (uint)bVar12 * auVar716._8_4_ | (uint)!bVar12 * auVar720._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar874._12_4_ = (uint)bVar12 * auVar716._12_4_ | (uint)!bVar12 * auVar720._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar874._16_4_ = (uint)bVar12 * auVar716._16_4_ | (uint)!bVar12 * auVar720._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar874._20_4_ = (uint)bVar12 * auVar716._20_4_ | (uint)!bVar12 * auVar720._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar874._24_4_ = (uint)bVar12 * auVar716._24_4_ | (uint)!bVar12 * auVar720._24_4_;
          bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
          auVar874._28_4_ = (uint)bVar12 * auVar716._28_4_ | (uint)!bVar12 * auVar720._28_4_;
          bVar29 = (byte)(uVar430 >> 8);
          bVar12 = (bool)(bVar29 & 1);
          auVar874._32_4_ = (uint)bVar12 * auVar716._32_4_ | (uint)!bVar12 * auVar720._32_4_;
          bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
          auVar874._36_4_ = (uint)bVar12 * auVar716._36_4_ | (uint)!bVar12 * auVar720._36_4_;
          bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
          auVar874._40_4_ = (uint)bVar12 * auVar716._40_4_ | (uint)!bVar12 * auVar720._40_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
          auVar874._44_4_ = (uint)bVar12 * auVar716._44_4_ | (uint)!bVar12 * auVar720._44_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
          auVar874._48_4_ = (uint)bVar12 * auVar716._48_4_ | (uint)!bVar12 * auVar720._48_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
          auVar874._52_4_ = (uint)bVar12 * auVar716._52_4_ | (uint)!bVar12 * auVar720._52_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
          auVar874._56_4_ = (uint)bVar12 * auVar716._56_4_ | (uint)!bVar12 * auVar720._56_4_;
          bVar12 = SUB81(uVar430 >> 0xf,0);
          auVar874._60_4_ = (uint)bVar12 * auVar716._60_4_ | (uint)!bVar12 * auVar720._60_4_;
          auVar734 = vaddps_avx512f(auVar719,auVar734);
          bVar12 = (bool)((byte)uVar430 & 1);
          auVar875._0_4_ = (uint)bVar12 * auVar734._0_4_ | (uint)!bVar12 * auVar719._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar875._4_4_ = (uint)bVar12 * auVar734._4_4_ | (uint)!bVar12 * auVar719._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar875._8_4_ = (uint)bVar12 * auVar734._8_4_ | (uint)!bVar12 * auVar719._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar875._12_4_ = (uint)bVar12 * auVar734._12_4_ | (uint)!bVar12 * auVar719._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar875._16_4_ = (uint)bVar12 * auVar734._16_4_ | (uint)!bVar12 * auVar719._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar875._20_4_ = (uint)bVar12 * auVar734._20_4_ | (uint)!bVar12 * auVar719._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar875._24_4_ = (uint)bVar12 * auVar734._24_4_ | (uint)!bVar12 * auVar719._24_4_;
          bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
          auVar875._28_4_ = (uint)bVar12 * auVar734._28_4_ | (uint)!bVar12 * auVar719._28_4_;
          bVar12 = (bool)(bVar29 & 1);
          auVar875._32_4_ = (uint)bVar12 * auVar734._32_4_ | (uint)!bVar12 * auVar719._32_4_;
          bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
          auVar875._36_4_ = (uint)bVar12 * auVar734._36_4_ | (uint)!bVar12 * auVar719._36_4_;
          bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
          auVar875._40_4_ = (uint)bVar12 * auVar734._40_4_ | (uint)!bVar12 * auVar719._40_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
          auVar875._44_4_ = (uint)bVar12 * auVar734._44_4_ | (uint)!bVar12 * auVar719._44_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
          auVar875._48_4_ = (uint)bVar12 * auVar734._48_4_ | (uint)!bVar12 * auVar719._48_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
          auVar875._52_4_ = (uint)bVar12 * auVar734._52_4_ | (uint)!bVar12 * auVar719._52_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
          auVar875._56_4_ = (uint)bVar12 * auVar734._56_4_ | (uint)!bVar12 * auVar719._56_4_;
          bVar12 = SUB81(uVar430 >> 0xf,0);
          auVar875._60_4_ = (uint)bVar12 * auVar734._60_4_ | (uint)!bVar12 * auVar719._60_4_;
          auVar734 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_log_p0,auVar875,
                                         (undefined1  [64])_ps512_cephes_log_p1);
          auVar734 = vfmadd213ps_avx512f(auVar734,auVar875,(undefined1  [64])_ps512_cephes_log_p2);
          auVar734 = vfmadd213ps_avx512f(auVar734,auVar875,(undefined1  [64])_ps512_cephes_log_p3);
          auVar734 = vfmadd213ps_avx512f(auVar734,auVar875,(undefined1  [64])_ps512_cephes_log_p4);
          auVar734 = vfmadd213ps_avx512f(auVar734,auVar875,(undefined1  [64])_ps512_cephes_log_p5);
          auVar734 = vfmadd213ps_avx512f(auVar734,auVar875,(undefined1  [64])_ps512_cephes_log_p6);
          auVar734 = vfmadd213ps_avx512f(auVar734,auVar875,(undefined1  [64])_ps512_cephes_log_p7);
          auVar734 = vfmadd213ps_avx512f(auVar734,auVar875,(undefined1  [64])_ps512_cephes_log_p8);
          auVar716 = vmulps_avx512f(auVar875,auVar875);
          auVar719 = vmulps_avx512f(auVar716,auVar875);
          auVar734 = vmulps_avx512f(auVar719,auVar734);
          auVar734 = vfmadd231ps_avx512f(auVar734,auVar874,(undefined1  [64])_ps512_cephes_log_q1);
          auVar734 = vfmsub231ps_avx512f(auVar734,auVar717,auVar716);
          auVar734 = vsubps_avx512f(auVar734,auVar875);
          auVar734 = vfmsub231ps_avx512f(auVar734,(undefined1  [64])_ps512_cephes_log_q2,auVar874);
          auVar716 = vpternlogd_avx512f(auVar716,auVar716,auVar716,0xff);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar876._0_4_ = (uint)bVar12 * auVar716._0_4_ | (uint)!bVar12 * auVar734._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar876._4_4_ = (uint)bVar12 * auVar716._4_4_ | (uint)!bVar12 * auVar734._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar876._8_4_ = (uint)bVar12 * auVar716._8_4_ | (uint)!bVar12 * auVar734._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar876._12_4_ = (uint)bVar12 * auVar716._12_4_ | (uint)!bVar12 * auVar734._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar876._16_4_ = (uint)bVar12 * auVar716._16_4_ | (uint)!bVar12 * auVar734._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar876._20_4_ = (uint)bVar12 * auVar716._20_4_ | (uint)!bVar12 * auVar734._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar876._24_4_ = (uint)bVar12 * auVar716._24_4_ | (uint)!bVar12 * auVar734._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar876._28_4_ = (uint)bVar12 * auVar716._28_4_ | (uint)!bVar12 * auVar734._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar876._32_4_ = (uint)bVar12 * auVar716._32_4_ | (uint)!bVar12 * auVar734._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar876._36_4_ = (uint)bVar12 * auVar716._36_4_ | (uint)!bVar12 * auVar734._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar876._40_4_ = (uint)bVar12 * auVar716._40_4_ | (uint)!bVar12 * auVar734._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar876._44_4_ = (uint)bVar12 * auVar716._44_4_ | (uint)!bVar12 * auVar734._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar876._48_4_ = (uint)bVar12 * auVar716._48_4_ | (uint)!bVar12 * auVar734._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar876._52_4_ = (uint)bVar12 * auVar716._52_4_ | (uint)!bVar12 * auVar734._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar876._56_4_ = (uint)bVar12 * auVar716._56_4_ | (uint)!bVar12 * auVar734._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar876._60_4_ = (uint)bVar12 * auVar716._60_4_ | (uint)!bVar12 * auVar734._60_4_;
          auVar734 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          auVar716 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar734);
          auVar734 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar734);
          iVar424 = 0xf;
          do {
            auVar719 = vmulps_avx512f(auVar876,*(undefined1 (*) [64])ptr1);
            auVar719 = vminps_avx512f(auVar719,(undefined1  [64])afVar408);
            auVar719 = vmaxps_avx512f(auVar719,(undefined1  [64])afVar409);
            auVar720 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar719,auVar717);
            auVar721 = vrndscaleps_avx512f(auVar720,1);
            uVar47 = vcmpps_avx512f(auVar720,auVar721,1);
            auVar720 = vsubps_avx512f(auVar721,(undefined1  [64])afVar407);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar877._0_4_ = (uint)bVar12 * auVar720._0_4_ | (uint)!bVar12 * auVar721._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar877._4_4_ = (uint)bVar12 * auVar720._4_4_ | (uint)!bVar12 * auVar721._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar877._8_4_ = (uint)bVar12 * auVar720._8_4_ | (uint)!bVar12 * auVar721._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar877._12_4_ = (uint)bVar12 * auVar720._12_4_ | (uint)!bVar12 * auVar721._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar877._16_4_ = (uint)bVar12 * auVar720._16_4_ | (uint)!bVar12 * auVar721._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar877._20_4_ = (uint)bVar12 * auVar720._20_4_ | (uint)!bVar12 * auVar721._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar877._24_4_ = (uint)bVar12 * auVar720._24_4_ | (uint)!bVar12 * auVar721._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar877._28_4_ = (uint)bVar12 * auVar720._28_4_ | (uint)!bVar12 * auVar721._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            auVar877._32_4_ = (uint)bVar12 * auVar720._32_4_ | (uint)!bVar12 * auVar721._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar877._36_4_ = (uint)bVar12 * auVar720._36_4_ | (uint)!bVar12 * auVar721._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar877._40_4_ = (uint)bVar12 * auVar720._40_4_ | (uint)!bVar12 * auVar721._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar877._44_4_ = (uint)bVar12 * auVar720._44_4_ | (uint)!bVar12 * auVar721._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar877._48_4_ = (uint)bVar12 * auVar720._48_4_ | (uint)!bVar12 * auVar721._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar877._52_4_ = (uint)bVar12 * auVar720._52_4_ | (uint)!bVar12 * auVar721._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar877._56_4_ = (uint)bVar12 * auVar720._56_4_ | (uint)!bVar12 * auVar721._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar877._60_4_ = (uint)bVar12 * auVar720._60_4_ | (uint)!bVar12 * auVar721._60_4_;
            auVar719 = vfmadd231ps_avx512f(auVar719,auVar877,auVar716);
            auVar719 = vfmadd231ps_avx512f(auVar719,auVar877,auVar734);
            auVar720 = vfmadd213ps_avx512f(auVar719,(undefined1  [64])afVar411,
                                           (undefined1  [64])afVar412);
            auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar413);
            auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar414);
            auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar415);
            auVar721 = vmulps_avx512f(auVar719,auVar719);
            auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,auVar717);
            auVar719 = vfmadd213ps_avx512f(auVar720,auVar721,auVar719);
            auVar720 = vcvttps2dq_avx512f(auVar877);
            auVar719 = vaddps_avx512f(auVar719,(undefined1  [64])afVar407);
            auVar720 = vpaddd_avx512f(auVar720,auVar718);
            auVar720 = vpslld_avx512f(auVar720,0x17);
            auVar719 = vmulps_avx512f(auVar719,auVar720);
            *(undefined1 (*) [64])outptr = auVar719;
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
          in_ZMM15 = afVar415;
        }
        if ((int)(uVar425 | 7) < (int)uVar427) {
          auVar261._8_4_ = 0x800000;
          auVar261._0_8_ = 0x80000000800000;
          auVar261._12_4_ = 0x800000;
          auVar261._16_4_ = 0x800000;
          auVar261._20_4_ = 0x800000;
          auVar261._24_4_ = 0x800000;
          auVar261._28_4_ = 0x800000;
          auVar674 = vmaxps_avx512vl(auVar1026,auVar261);
          auVar678 = vpsrld_avx2(auVar674,0x17);
          auVar1211._8_4_ = 0x3f000000;
          auVar1211._0_8_ = 0x3f0000003f000000;
          auVar1211._12_4_ = 0x3f000000;
          auVar1211._16_4_ = 0x3f000000;
          auVar1211._20_4_ = 0x3f000000;
          auVar1211._24_4_ = 0x3f000000;
          auVar1211._28_4_ = 0x3f000000;
          auVar262._8_4_ = 0x807fffff;
          auVar262._0_8_ = 0x807fffff807fffff;
          auVar262._12_4_ = 0x807fffff;
          auVar262._16_4_ = 0x807fffff;
          auVar262._20_4_ = 0x807fffff;
          auVar262._24_4_ = 0x807fffff;
          auVar262._28_4_ = 0x807fffff;
          auVar677 = vpternlogd_avx512vl(auVar1211,auVar674,auVar262,0xf8);
          auVar263._8_4_ = 0xffffff82;
          auVar263._0_8_ = 0xffffff82ffffff82;
          auVar263._12_4_ = 0xffffff82;
          auVar263._16_4_ = 0xffffff82;
          auVar263._20_4_ = 0xffffff82;
          auVar263._24_4_ = 0xffffff82;
          auVar263._28_4_ = 0xffffff82;
          auVar674 = vpaddd_avx512vl(auVar678,auVar263);
          auVar674 = vcvtdq2ps_avx(auVar674);
          auVar264._8_4_ = 0x3f3504f3;
          auVar264._0_8_ = 0x3f3504f33f3504f3;
          auVar264._12_4_ = 0x3f3504f3;
          auVar264._16_4_ = 0x3f3504f3;
          auVar264._20_4_ = 0x3f3504f3;
          auVar264._24_4_ = 0x3f3504f3;
          auVar264._28_4_ = 0x3f3504f3;
          uVar47 = vcmpps_avx512vl(auVar677,auVar264,1);
          auVar1105._8_4_ = 0xbf800000;
          auVar1105._0_8_ = 0xbf800000bf800000;
          auVar1105._12_4_ = 0xbf800000;
          auVar1105._16_4_ = 0xbf800000;
          auVar1105._20_4_ = 0xbf800000;
          auVar1105._24_4_ = 0xbf800000;
          auVar1105._28_4_ = 0xbf800000;
          auVar1340._0_4_ = auVar677._0_4_ + -1.0;
          auVar1340._4_4_ = auVar677._4_4_ + -1.0;
          auVar1340._8_4_ = auVar677._8_4_ + -1.0;
          auVar1340._12_4_ = auVar677._12_4_ + -1.0;
          auVar1340._16_4_ = auVar677._16_4_ + -1.0;
          auVar1340._20_4_ = auVar677._20_4_ + -1.0;
          auVar1340._24_4_ = auVar677._24_4_ + -1.0;
          auVar1340._28_4_ = auVar677._28_4_ + -1.0;
          auVar678 = vaddps_avx512vl(auVar674,auVar1105);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar707._0_4_ = (uint)bVar12 * auVar678._0_4_ | (uint)!bVar12 * auVar674._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar707._4_4_ = (uint)bVar12 * auVar678._4_4_ | (uint)!bVar12 * auVar674._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar707._8_4_ = (uint)bVar12 * auVar678._8_4_ | (uint)!bVar12 * auVar674._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar707._12_4_ = (uint)bVar12 * auVar678._12_4_ | (uint)!bVar12 * auVar674._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar707._16_4_ = (uint)bVar12 * auVar678._16_4_ | (uint)!bVar12 * auVar674._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar707._20_4_ = (uint)bVar12 * auVar678._20_4_ | (uint)!bVar12 * auVar674._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar707._24_4_ = (uint)bVar12 * auVar678._24_4_ | (uint)!bVar12 * auVar674._24_4_;
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar707._28_4_ = (uint)bVar12 * auVar678._28_4_ | (uint)!bVar12 * auVar674._28_4_;
          auVar674 = vaddps_avx512vl(auVar1340,auVar677);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar708._0_4_ =
               (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * (int)auVar1340._0_4_);
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar708._4_4_ =
               (float)((uint)bVar12 * auVar674._4_4_ | (uint)!bVar12 * (int)auVar1340._4_4_);
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar708._8_4_ =
               (float)((uint)bVar12 * auVar674._8_4_ | (uint)!bVar12 * (int)auVar1340._8_4_);
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar708._12_4_ =
               (float)((uint)bVar12 * auVar674._12_4_ | (uint)!bVar12 * (int)auVar1340._12_4_);
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar708._16_4_ =
               (float)((uint)bVar12 * auVar674._16_4_ | (uint)!bVar12 * (int)auVar1340._16_4_);
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar708._20_4_ =
               (float)((uint)bVar12 * auVar674._20_4_ | (uint)!bVar12 * (int)auVar1340._20_4_);
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar708._24_4_ =
               (float)((uint)bVar12 * auVar674._24_4_ | (uint)!bVar12 * (int)auVar1340._24_4_);
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar708._28_4_ = (uint)bVar12 * auVar674._28_4_ | (uint)!bVar12 * (int)auVar1340._28_4_;
          auVar393._4_4_ = auVar708._4_4_ * auVar708._4_4_;
          auVar393._0_4_ = auVar708._0_4_ * auVar708._0_4_;
          auVar393._8_4_ = auVar708._8_4_ * auVar708._8_4_;
          auVar393._12_4_ = auVar708._12_4_ * auVar708._12_4_;
          auVar393._16_4_ = auVar708._16_4_ * auVar708._16_4_;
          auVar393._20_4_ = auVar708._20_4_ * auVar708._20_4_;
          auVar393._24_4_ = auVar708._24_4_ * auVar708._24_4_;
          auVar393._28_4_ = auVar677._28_4_;
          auVar1396._8_4_ = 0x3d9021bb;
          auVar1396._0_8_ = 0x3d9021bb3d9021bb;
          auVar1396._12_4_ = 0x3d9021bb;
          auVar1396._16_4_ = 0x3d9021bb;
          auVar1396._20_4_ = 0x3d9021bb;
          auVar1396._24_4_ = 0x3d9021bb;
          auVar1396._28_4_ = 0x3d9021bb;
          auVar265._8_4_ = 0xbdebd1b8;
          auVar265._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar265._12_4_ = 0xbdebd1b8;
          auVar265._16_4_ = 0xbdebd1b8;
          auVar265._20_4_ = 0xbdebd1b8;
          auVar265._24_4_ = 0xbdebd1b8;
          auVar265._28_4_ = 0xbdebd1b8;
          auVar674 = vfmadd213ps_avx512vl(auVar1396,auVar708,auVar265);
          auVar266._8_4_ = 0x3def251a;
          auVar266._0_8_ = 0x3def251a3def251a;
          auVar266._12_4_ = 0x3def251a;
          auVar266._16_4_ = 0x3def251a;
          auVar266._20_4_ = 0x3def251a;
          auVar266._24_4_ = 0x3def251a;
          auVar266._28_4_ = 0x3def251a;
          auVar674 = vfmadd213ps_avx512vl(auVar674,auVar708,auVar266);
          auVar267._8_4_ = 0xbdfe5d4f;
          auVar267._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar267._12_4_ = 0xbdfe5d4f;
          auVar267._16_4_ = 0xbdfe5d4f;
          auVar267._20_4_ = 0xbdfe5d4f;
          auVar267._24_4_ = 0xbdfe5d4f;
          auVar267._28_4_ = 0xbdfe5d4f;
          auVar674 = vfmadd213ps_avx512vl(auVar674,auVar708,auVar267);
          auVar268._8_4_ = 0x3e11e9bf;
          auVar268._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar268._12_4_ = 0x3e11e9bf;
          auVar268._16_4_ = 0x3e11e9bf;
          auVar268._20_4_ = 0x3e11e9bf;
          auVar268._24_4_ = 0x3e11e9bf;
          auVar268._28_4_ = 0x3e11e9bf;
          auVar674 = vfmadd213ps_avx512vl(auVar674,auVar708,auVar268);
          auVar269._8_4_ = 0xbe2aae50;
          auVar269._0_8_ = 0xbe2aae50be2aae50;
          auVar269._12_4_ = 0xbe2aae50;
          auVar269._16_4_ = 0xbe2aae50;
          auVar269._20_4_ = 0xbe2aae50;
          auVar269._24_4_ = 0xbe2aae50;
          auVar269._28_4_ = 0xbe2aae50;
          auVar674 = vfmadd213ps_avx512vl(auVar674,auVar708,auVar269);
          auVar270._8_4_ = 0x3e4cceac;
          auVar270._0_8_ = 0x3e4cceac3e4cceac;
          auVar270._12_4_ = 0x3e4cceac;
          auVar270._16_4_ = 0x3e4cceac;
          auVar270._20_4_ = 0x3e4cceac;
          auVar270._24_4_ = 0x3e4cceac;
          auVar270._28_4_ = 0x3e4cceac;
          auVar674 = vfmadd213ps_avx512vl(auVar674,auVar708,auVar270);
          auVar271._8_4_ = 0xbe7ffffc;
          auVar271._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar271._12_4_ = 0xbe7ffffc;
          auVar271._16_4_ = 0xbe7ffffc;
          auVar271._20_4_ = 0xbe7ffffc;
          auVar271._24_4_ = 0xbe7ffffc;
          auVar271._28_4_ = 0xbe7ffffc;
          auVar674 = vfmadd213ps_avx512vl(auVar674,auVar708,auVar271);
          auVar272._8_4_ = 0x3eaaaaaa;
          auVar272._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar272._12_4_ = 0x3eaaaaaa;
          auVar272._16_4_ = 0x3eaaaaaa;
          auVar272._20_4_ = 0x3eaaaaaa;
          auVar272._24_4_ = 0x3eaaaaaa;
          auVar272._28_4_ = 0x3eaaaaaa;
          auVar674 = vfmadd213ps_avx512vl(auVar674,auVar708,auVar272);
          auVar394._4_4_ = auVar708._4_4_ * auVar708._4_4_ * auVar708._4_4_ * auVar674._4_4_;
          auVar394._0_4_ = auVar708._0_4_ * auVar708._0_4_ * auVar708._0_4_ * auVar674._0_4_;
          auVar394._8_4_ = auVar708._8_4_ * auVar708._8_4_ * auVar708._8_4_ * auVar674._8_4_;
          auVar394._12_4_ = auVar708._12_4_ * auVar708._12_4_ * auVar708._12_4_ * auVar674._12_4_;
          auVar394._16_4_ = auVar708._16_4_ * auVar708._16_4_ * auVar708._16_4_ * auVar674._16_4_;
          auVar394._20_4_ = auVar708._20_4_ * auVar708._20_4_ * auVar708._20_4_ * auVar674._20_4_;
          auVar394._24_4_ = auVar708._24_4_ * auVar708._24_4_ * auVar708._24_4_ * auVar674._24_4_;
          auVar394._28_4_ = auVar674._28_4_;
          auVar273._8_4_ = 0xb95e8083;
          auVar273._0_8_ = 0xb95e8083b95e8083;
          auVar273._12_4_ = 0xb95e8083;
          auVar273._16_4_ = 0xb95e8083;
          auVar273._20_4_ = 0xb95e8083;
          auVar273._24_4_ = 0xb95e8083;
          auVar273._28_4_ = 0xb95e8083;
          auVar674 = vfmadd231ps_avx512vl(auVar394,auVar707,auVar273);
          auVar678 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          uVar47 = vcmpps_avx512vl(auVar1026,auVar678,2);
          auVar274._8_4_ = 0x3f000000;
          auVar274._0_8_ = 0x3f0000003f000000;
          auVar274._12_4_ = 0x3f000000;
          auVar274._16_4_ = 0x3f000000;
          auVar274._20_4_ = 0x3f000000;
          auVar274._24_4_ = 0x3f000000;
          auVar274._28_4_ = 0x3f000000;
          auVar674 = vfmsub231ps_avx512vl(auVar674,auVar393,auVar274);
          auVar674 = vsubps_avx(auVar674,auVar708);
          auVar275._8_4_ = 0x3f318000;
          auVar275._0_8_ = 0x3f3180003f318000;
          auVar275._12_4_ = 0x3f318000;
          auVar275._16_4_ = 0x3f318000;
          auVar275._20_4_ = 0x3f318000;
          auVar275._24_4_ = 0x3f318000;
          auVar275._28_4_ = 0x3f318000;
          auVar677 = vfmsub231ps_avx512vl(auVar674,auVar707,auVar275);
          auVar674 = vpcmpeqd_avx2(auVar678,auVar678);
          bVar12 = (bool)((byte)uVar47 & 1);
          bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar47 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar47 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar1156._8_4_ = 0x42b0c0a5;
          auVar1156._0_8_ = 0x42b0c0a542b0c0a5;
          auVar1156._12_4_ = 0x42b0c0a5;
          auVar1156._16_4_ = 0x42b0c0a5;
          auVar1156._20_4_ = 0x42b0c0a5;
          auVar1156._24_4_ = 0x42b0c0a5;
          auVar1156._28_4_ = 0x42b0c0a5;
          auVar1212._8_4_ = 0xc2b0c0a5;
          auVar1212._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar1212._12_4_ = 0xc2b0c0a5;
          auVar1212._16_4_ = 0xc2b0c0a5;
          auVar1212._20_4_ = 0xc2b0c0a5;
          auVar1212._24_4_ = 0xc2b0c0a5;
          auVar1212._28_4_ = 0xc2b0c0a5;
          auVar1275._8_4_ = 0x3f000000;
          auVar1275._0_8_ = 0x3f0000003f000000;
          auVar1275._12_4_ = 0x3f000000;
          auVar1275._16_4_ = 0x3f000000;
          auVar1275._20_4_ = 0x3f000000;
          auVar1275._24_4_ = 0x3f000000;
          auVar1275._28_4_ = 0x3f000000;
          auVar1341._8_4_ = 0x3fb8aa3b;
          auVar1341._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar1341._12_4_ = 0x3fb8aa3b;
          auVar1341._16_4_ = 0x3fb8aa3b;
          auVar1341._20_4_ = 0x3fb8aa3b;
          auVar1341._24_4_ = 0x3fb8aa3b;
          auVar1341._28_4_ = 0x3fb8aa3b;
          auVar1397._8_4_ = 0x3f318000;
          auVar1397._0_8_ = 0x3f3180003f318000;
          auVar1397._12_4_ = 0x3f318000;
          auVar1397._16_4_ = 0x3f318000;
          auVar1397._20_4_ = 0x3f318000;
          auVar1397._24_4_ = 0x3f318000;
          auVar1397._28_4_ = 0x3f318000;
          auVar1452._8_4_ = 0x395e8083;
          auVar1452._0_8_ = 0x395e8083395e8083;
          auVar1452._12_4_ = 0x395e8083;
          auVar1452._16_4_ = 0x395e8083;
          auVar1452._20_4_ = 0x395e8083;
          auVar1452._24_4_ = 0x395e8083;
          auVar1452._28_4_ = 0x395e8083;
          auVar1506._8_4_ = 0x39506967;
          auVar1506._0_8_ = 0x3950696739506967;
          auVar1506._12_4_ = 0x39506967;
          auVar1506._16_4_ = 0x39506967;
          auVar1506._20_4_ = 0x39506967;
          auVar1506._24_4_ = 0x39506967;
          auVar1506._28_4_ = 0x39506967;
          auVar1560._8_4_ = 0x3ab743ce;
          auVar1560._0_8_ = 0x3ab743ce3ab743ce;
          auVar1560._12_4_ = 0x3ab743ce;
          auVar1560._16_4_ = 0x3ab743ce;
          auVar1560._20_4_ = 0x3ab743ce;
          auVar1560._24_4_ = 0x3ab743ce;
          auVar1560._28_4_ = 0x3ab743ce;
          auVar1614._8_4_ = 0x3c088908;
          auVar1614._0_8_ = 0x3c0889083c088908;
          auVar1614._12_4_ = 0x3c088908;
          auVar1614._16_4_ = 0x3c088908;
          auVar1614._20_4_ = 0x3c088908;
          auVar1614._24_4_ = 0x3c088908;
          auVar1614._28_4_ = 0x3c088908;
          auVar1668._8_4_ = 0x3d2aa9c1;
          auVar1668._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar1668._12_4_ = 0x3d2aa9c1;
          auVar1668._16_4_ = 0x3d2aa9c1;
          auVar1668._20_4_ = 0x3d2aa9c1;
          auVar1668._24_4_ = 0x3d2aa9c1;
          auVar1668._28_4_ = 0x3d2aa9c1;
          auVar1722._8_4_ = 0x3e2aaaaa;
          auVar1722._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar1722._12_4_ = 0x3e2aaaaa;
          auVar1722._16_4_ = 0x3e2aaaaa;
          auVar1722._20_4_ = 0x3e2aaaaa;
          auVar1722._24_4_ = 0x3e2aaaaa;
          auVar1722._28_4_ = 0x3e2aaaaa;
          auVar1772._8_4_ = 0x3f800000;
          auVar1772._0_8_ = 0x3f8000003f800000;
          auVar1772._12_4_ = 0x3f800000;
          auVar1772._16_4_ = 0x3f800000;
          auVar1772._20_4_ = 0x3f800000;
          auVar1772._24_4_ = 0x3f800000;
          auVar1772._28_4_ = 0x3f800000;
          uVar882 = uVar425;
          do {
            auVar1823._0_4_ =
                 (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar677._0_4_) *
                 *(float *)*(undefined1 (*) [64])ptr1;
            auVar1823._4_4_ =
                 (float)((uint)bVar13 * auVar674._4_4_ | (uint)!bVar13 * auVar677._4_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 4);
            auVar1823._8_4_ =
                 (float)((uint)bVar14 * auVar674._8_4_ | (uint)!bVar14 * auVar677._8_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 8);
            auVar1823._12_4_ =
                 (float)((uint)bVar15 * auVar674._12_4_ | (uint)!bVar15 * auVar677._12_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
            auVar1823._16_4_ =
                 (float)((uint)bVar16 * auVar674._16_4_ | (uint)!bVar16 * auVar677._16_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 0x10);
            auVar1823._20_4_ =
                 (float)((uint)bVar17 * auVar674._20_4_ | (uint)!bVar17 * auVar677._20_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 0x14);
            auVar1823._28_36_ = in_ZMM15._28_36_;
            auVar1823._24_4_ =
                 (float)((uint)bVar18 * auVar674._24_4_ | (uint)!bVar18 * auVar677._24_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 0x18);
            auVar678 = vminps_avx(auVar1823._0_32_,auVar1156);
            auVar678 = vmaxps_avx(auVar678,auVar1212);
            auVar562 = vfmadd231ps_avx512vl(auVar1275,auVar678,auVar1341);
            auVar679 = vrndscaleps_avx512vl(auVar562,1);
            uVar47 = vcmpps_avx512vl(auVar562,auVar679,1);
            auVar562 = vaddps_avx512vl(auVar679,auVar1105);
            bVar19 = (bool)((byte)uVar47 & 1);
            auVar709._0_4_ = (uint)bVar19 * auVar562._0_4_ | (uint)!bVar19 * auVar679._0_4_;
            bVar19 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar709._4_4_ = (uint)bVar19 * auVar562._4_4_ | (uint)!bVar19 * auVar679._4_4_;
            bVar19 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar709._8_4_ = (uint)bVar19 * auVar562._8_4_ | (uint)!bVar19 * auVar679._8_4_;
            bVar19 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar709._12_4_ = (uint)bVar19 * auVar562._12_4_ | (uint)!bVar19 * auVar679._12_4_;
            bVar19 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar709._16_4_ = (uint)bVar19 * auVar562._16_4_ | (uint)!bVar19 * auVar679._16_4_;
            bVar19 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar709._20_4_ = (uint)bVar19 * auVar562._20_4_ | (uint)!bVar19 * auVar679._20_4_;
            bVar19 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar709._24_4_ = (uint)bVar19 * auVar562._24_4_ | (uint)!bVar19 * auVar679._24_4_;
            bVar19 = SUB81(uVar47 >> 7,0);
            auVar709._28_4_ = (uint)bVar19 * auVar562._28_4_ | (uint)!bVar19 * auVar679._28_4_;
            auVar678 = vfmsub231ps_avx512vl(auVar678,auVar709,auVar1397);
            auVar678 = vfmsub231ps_avx512vl(auVar678,auVar709,auVar1452);
            auVar562 = vfmadd213ps_avx512vl(auVar1506,auVar678,auVar1560);
            auVar679 = vmulps_avx512vl(auVar678,auVar678);
            auVar562 = vfmadd213ps_avx512vl(auVar562,auVar678,auVar1614);
            auVar562 = vfmadd213ps_avx512vl(auVar562,auVar678,auVar1668);
            auVar562 = vfmadd213ps_avx512vl(auVar562,auVar678,auVar1722);
            auVar562 = vfmadd213ps_avx512vl(auVar562,auVar678,auVar1275);
            auVar562 = vfmadd213ps_avx512vl(auVar562,auVar679,auVar678);
            auVar678 = vcvttps2dq_avx512vl(auVar709);
            auVar678 = vpslld_avx2(auVar678,0x17);
            auVar678 = vpaddd_avx2(auVar678,auVar1772);
            auVar678 = vfmadd213ps_avx512vl(auVar678,auVar562,auVar678);
            in_ZMM15 = (float  [16])ZEXT3264(auVar678);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar678;
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)(uVar425 | 3) < (int)uVar427) {
          auVar122._8_4_ = 0x800000;
          auVar122._0_8_ = 0x80000000800000;
          auVar122._12_4_ = 0x800000;
          auVar442 = vmaxps_avx512vl(auVar907,auVar122);
          auVar461 = vpsrld_avx(auVar442,0x17);
          auVar1128._8_4_ = 0x3f000000;
          auVar1128._0_8_ = 0x3f0000003f000000;
          auVar1128._12_4_ = 0x3f000000;
          auVar123._8_4_ = 0x807fffff;
          auVar123._0_8_ = 0x807fffff807fffff;
          auVar123._12_4_ = 0x807fffff;
          auVar460 = vpternlogd_avx512vl(auVar1128,auVar442,auVar123,0xf8);
          auVar124._8_4_ = 0xffffff82;
          auVar124._0_8_ = 0xffffff82ffffff82;
          auVar124._12_4_ = 0xffffff82;
          auVar442 = vpaddd_avx512vl(auVar461,auVar124);
          auVar442 = vcvtdq2ps_avx(auVar442);
          auVar125._8_4_ = 0x3f3504f3;
          auVar125._0_8_ = 0x3f3504f33f3504f3;
          auVar125._12_4_ = 0x3f3504f3;
          uVar47 = vcmpps_avx512vl(auVar460,auVar125,1);
          auVar973._8_4_ = 0xbf800000;
          auVar973._0_8_ = 0xbf800000bf800000;
          auVar973._12_4_ = 0xbf800000;
          auVar1235._0_4_ = auVar460._0_4_ + -1.0;
          auVar1235._4_4_ = auVar460._4_4_ + -1.0;
          auVar1235._8_4_ = auVar460._8_4_ + -1.0;
          auVar1235._12_4_ = auVar460._12_4_ + -1.0;
          auVar461 = vaddps_avx512vl(auVar442,auVar973);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar529._0_4_ = (uint)bVar12 * auVar461._0_4_ | (uint)!bVar12 * auVar442._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar529._4_4_ = (uint)bVar12 * auVar461._4_4_ | (uint)!bVar12 * auVar442._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar529._8_4_ = (uint)bVar12 * auVar461._8_4_ | (uint)!bVar12 * auVar442._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar529._12_4_ = (uint)bVar12 * auVar461._12_4_ | (uint)!bVar12 * auVar442._12_4_;
          auVar442 = vaddps_avx512vl(auVar1235,auVar460);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar530._0_4_ =
               (float)((uint)bVar12 * auVar442._0_4_ | (uint)!bVar12 * (int)auVar1235._0_4_);
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar530._4_4_ =
               (float)((uint)bVar12 * auVar442._4_4_ | (uint)!bVar12 * (int)auVar1235._4_4_);
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar530._8_4_ =
               (float)((uint)bVar12 * auVar442._8_4_ | (uint)!bVar12 * (int)auVar1235._8_4_);
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar530._12_4_ =
               (float)((uint)bVar12 * auVar442._12_4_ | (uint)!bVar12 * (int)auVar1235._12_4_);
          auVar1129._0_4_ = auVar530._0_4_ * auVar530._0_4_;
          auVar1129._4_4_ = auVar530._4_4_ * auVar530._4_4_;
          auVar1129._8_4_ = auVar530._8_4_ * auVar530._8_4_;
          auVar1129._12_4_ = auVar530._12_4_ * auVar530._12_4_;
          auVar1300._8_4_ = 0x3d9021bb;
          auVar1300._0_8_ = 0x3d9021bb3d9021bb;
          auVar1300._12_4_ = 0x3d9021bb;
          auVar126._8_4_ = 0xbdebd1b8;
          auVar126._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar126._12_4_ = 0xbdebd1b8;
          auVar442 = vfmadd213ps_avx512vl(auVar1300,auVar530,auVar126);
          auVar127._8_4_ = 0x3def251a;
          auVar127._0_8_ = 0x3def251a3def251a;
          auVar127._12_4_ = 0x3def251a;
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar530,auVar127);
          auVar128._8_4_ = 0xbdfe5d4f;
          auVar128._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar128._12_4_ = 0xbdfe5d4f;
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar530,auVar128);
          auVar129._8_4_ = 0x3e11e9bf;
          auVar129._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar129._12_4_ = 0x3e11e9bf;
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar530,auVar129);
          auVar130._8_4_ = 0xbe2aae50;
          auVar130._0_8_ = 0xbe2aae50be2aae50;
          auVar130._12_4_ = 0xbe2aae50;
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar530,auVar130);
          auVar131._8_4_ = 0x3e4cceac;
          auVar131._0_8_ = 0x3e4cceac3e4cceac;
          auVar131._12_4_ = 0x3e4cceac;
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar530,auVar131);
          auVar132._8_4_ = 0xbe7ffffc;
          auVar132._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar132._12_4_ = 0xbe7ffffc;
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar530,auVar132);
          auVar133._8_4_ = 0x3eaaaaaa;
          auVar133._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar133._12_4_ = 0x3eaaaaaa;
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar530,auVar133);
          auVar1301._0_4_ = auVar1129._0_4_ * auVar530._0_4_ * auVar442._0_4_;
          auVar1301._4_4_ = auVar1129._4_4_ * auVar530._4_4_ * auVar442._4_4_;
          auVar1301._8_4_ = auVar1129._8_4_ * auVar530._8_4_ * auVar442._8_4_;
          auVar1301._12_4_ = auVar1129._12_4_ * auVar530._12_4_ * auVar442._12_4_;
          auVar134._8_4_ = 0xb95e8083;
          auVar134._0_8_ = 0xb95e8083b95e8083;
          auVar134._12_4_ = 0xb95e8083;
          auVar442 = vfmadd231ps_avx512vl(auVar1301,auVar529,auVar134);
          uVar47 = vcmpps_avx512vl(auVar907,(undefined1  [16])0x0,2);
          auVar135._8_4_ = 0x3f000000;
          auVar135._0_8_ = 0x3f0000003f000000;
          auVar135._12_4_ = 0x3f000000;
          auVar442 = vfmsub231ps_avx512vl(auVar442,auVar1129,auVar135);
          auVar442 = vsubps_avx(auVar442,auVar530);
          auVar136._8_4_ = 0x3f318000;
          auVar136._0_8_ = 0x3f3180003f318000;
          auVar136._12_4_ = 0x3f318000;
          auVar460 = vfmsub231ps_avx512vl(auVar442,auVar529,auVar136);
          auVar442 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          bVar12 = (bool)((byte)uVar47 & 1);
          bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar1049._8_4_ = 0x42b0c0a5;
          auVar1049._0_8_ = 0x42b0c0a542b0c0a5;
          auVar1049._12_4_ = 0x42b0c0a5;
          auVar1130._8_4_ = 0xc2b0c0a5;
          auVar1130._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar1130._12_4_ = 0xc2b0c0a5;
          auVar1184._8_4_ = 0x3f000000;
          auVar1184._0_8_ = 0x3f0000003f000000;
          auVar1184._12_4_ = 0x3f000000;
          auVar1236._8_4_ = 0x3fb8aa3b;
          auVar1236._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar1236._12_4_ = 0x3fb8aa3b;
          auVar1302._8_4_ = 0x3f318000;
          auVar1302._0_8_ = 0x3f3180003f318000;
          auVar1302._12_4_ = 0x3f318000;
          auVar1361._8_4_ = 0x395e8083;
          auVar1361._0_8_ = 0x395e8083395e8083;
          auVar1361._12_4_ = 0x395e8083;
          auVar1417._8_4_ = 0x39506967;
          auVar1417._0_8_ = 0x3950696739506967;
          auVar1417._12_4_ = 0x39506967;
          auVar1471._8_4_ = 0x3ab743ce;
          auVar1471._0_8_ = 0x3ab743ce3ab743ce;
          auVar1471._12_4_ = 0x3ab743ce;
          auVar1525._8_4_ = 0x3c088908;
          auVar1525._0_8_ = 0x3c0889083c088908;
          auVar1525._12_4_ = 0x3c088908;
          auVar1579._8_4_ = 0x3d2aa9c1;
          auVar1579._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar1579._12_4_ = 0x3d2aa9c1;
          auVar1633._8_4_ = 0x3e2aaaaa;
          auVar1633._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar1633._12_4_ = 0x3e2aaaaa;
          auVar1687._8_4_ = 0x3f800000;
          auVar1687._0_8_ = 0x3f8000003f800000;
          auVar1687._12_4_ = 0x3f800000;
          uVar882 = uVar425;
          do {
            auVar1741._0_4_ =
                 (float)((uint)bVar12 * auVar442._0_4_ | (uint)!bVar12 * auVar460._0_4_) *
                 *(float *)*(undefined1 (*) [64])ptr1;
            auVar1741._4_4_ =
                 (float)((uint)bVar13 * auVar442._4_4_ | (uint)!bVar13 * auVar460._4_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 4);
            auVar1741._8_4_ =
                 (float)((uint)bVar14 * auVar442._8_4_ | (uint)!bVar14 * auVar460._8_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 8);
            auVar1741._12_4_ =
                 (float)((uint)bVar15 * auVar442._12_4_ | (uint)!bVar15 * auVar460._12_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
            auVar461 = vminps_avx(auVar1741,auVar1049);
            auVar461 = vmaxps_avx(auVar461,auVar1130);
            auVar519 = vfmadd231ps_fma(auVar1184,auVar461,auVar1236);
            auVar472 = vcvttps2dq_avx512vl(auVar519);
            auVar472 = vcvtdq2ps_avx512vl(auVar472);
            uVar47 = vcmpps_avx512vl(auVar519,auVar472,1);
            auVar519 = vaddps_avx512vl(auVar472,auVar973);
            bVar16 = (bool)((byte)uVar47 & 1);
            auVar531._0_4_ = (uint)bVar16 * auVar519._0_4_ | (uint)!bVar16 * auVar472._0_4_;
            bVar16 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar531._4_4_ = (uint)bVar16 * auVar519._4_4_ | (uint)!bVar16 * auVar472._4_4_;
            bVar16 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar531._8_4_ = (uint)bVar16 * auVar519._8_4_ | (uint)!bVar16 * auVar472._8_4_;
            bVar16 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar531._12_4_ = (uint)bVar16 * auVar519._12_4_ | (uint)!bVar16 * auVar472._12_4_;
            auVar461 = vfmsub231ps_avx512vl(auVar461,auVar531,auVar1302);
            auVar519 = vfmsub231ps_avx512vl(auVar461,auVar531,auVar1361);
            auVar461 = vfmadd213ps_fma(auVar1417,auVar519,auVar1471);
            auVar472 = vmulps_avx512vl(auVar519,auVar519);
            auVar461 = vfmadd213ps_fma(auVar461,auVar519,auVar1525);
            auVar461 = vfmadd213ps_fma(auVar461,auVar519,auVar1579);
            auVar461 = vfmadd213ps_fma(auVar461,auVar519,auVar1633);
            auVar461 = vfmadd213ps_fma(auVar461,auVar519,auVar1184);
            auVar519 = vfmadd213ps_avx512vl(auVar461,auVar472,auVar519);
            auVar461 = vcvttps2dq_avx512vl(auVar531);
            auVar461 = vpslld_avx(auVar461,0x17);
            auVar461 = vpaddd_avx(auVar461,auVar1687);
            auVar461 = vfmadd213ps_fma(auVar461,auVar519,auVar461);
            *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar461;
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
            uVar425 = uVar882 + 4;
            iVar424 = uVar882 + 7;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          return;
        }
        lVar428 = 0;
        do {
          fVar891 = powf(fVar890,*(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4));
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = fVar891;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
    }
    if (bp != 1) {
      return;
    }
    if (aw == bw) {
      if (0 < (int)uVar425 && iVar424 == 0x10) {
        auVar734 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar716 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar717 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar718 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar719 = vpxord_avx512f(auVar734,auVar717);
        auVar720 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar721 = vpxord_avx512f(auVar720,auVar717);
        auVar717 = vpxord_avx512f(auVar718,auVar717);
        auVar472 = vxorps_avx512vl(auVar472,auVar472);
        in_ZMM29 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
        uVar427 = uVar425;
        do {
          auVar722 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,(undefined1  [64])_ps512_min_norm_pos)
          ;
          auVar723 = vpsrld_avx512f(auVar722,0x17);
          auVar722 = vpternlogd_avx512f(auVar722,auVar734,(undefined1  [64])_ps512_inv_mant_mask,
                                        0xec);
          uVar47 = vcmpps_avx512f(auVar722,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar724 = vsubps_avx512f(auVar722,(undefined1  [64])afVar407);
          auVar722 = vaddps_avx512f(auVar724,auVar722);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar779._0_4_ = (uint)bVar12 * auVar722._0_4_ | (uint)!bVar12 * auVar724._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar779._4_4_ = (uint)bVar12 * auVar722._4_4_ | (uint)!bVar12 * auVar724._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar779._8_4_ = (uint)bVar12 * auVar722._8_4_ | (uint)!bVar12 * auVar724._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar779._12_4_ = (uint)bVar12 * auVar722._12_4_ | (uint)!bVar12 * auVar724._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar779._16_4_ = (uint)bVar12 * auVar722._16_4_ | (uint)!bVar12 * auVar724._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar779._20_4_ = (uint)bVar12 * auVar722._20_4_ | (uint)!bVar12 * auVar724._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar779._24_4_ = (uint)bVar12 * auVar722._24_4_ | (uint)!bVar12 * auVar724._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar779._28_4_ = (uint)bVar12 * auVar722._28_4_ | (uint)!bVar12 * auVar724._28_4_;
          bVar29 = (byte)(uVar47 >> 8);
          bVar12 = (bool)(bVar29 & 1);
          auVar779._32_4_ = (uint)bVar12 * auVar722._32_4_ | (uint)!bVar12 * auVar724._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar779._36_4_ = (uint)bVar12 * auVar722._36_4_ | (uint)!bVar12 * auVar724._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar779._40_4_ = (uint)bVar12 * auVar722._40_4_ | (uint)!bVar12 * auVar724._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar779._44_4_ = (uint)bVar12 * auVar722._44_4_ | (uint)!bVar12 * auVar724._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar779._48_4_ = (uint)bVar12 * auVar722._48_4_ | (uint)!bVar12 * auVar724._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar779._52_4_ = (uint)bVar12 * auVar722._52_4_ | (uint)!bVar12 * auVar724._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar779._56_4_ = (uint)bVar12 * auVar722._56_4_ | (uint)!bVar12 * auVar724._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar779._60_4_ = (uint)bVar12 * auVar722._60_4_ | (uint)!bVar12 * auVar724._60_4_;
          auVar722 = vfmadd132ps_avx512f(auVar779,(undefined1  [64])afVar416,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar779,(undefined1  [64])afVar417);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar779,(undefined1  [64])afVar418);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar779,(undefined1  [64])afVar419);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar779,(undefined1  [64])afVar420);
          auVar724 = vmulps_avx512f(auVar779,auVar779);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar779,(undefined1  [64])afVar421);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar779,(undefined1  [64])afVar422);
          auVar725 = vmulps_avx512f(auVar724,auVar779);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar779,(undefined1  [64])afVar423);
          auVar722 = vfmadd213ps_avx512f(auVar725,auVar722,auVar779);
          auVar723 = vpsubd_avx512f(auVar723,auVar716);
          auVar723 = vcvtdq2ps_avx512f(auVar723);
          auVar725 = vaddps_avx512f(auVar723,(undefined1  [64])afVar407);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar780._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar725._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar780._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar725._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar780._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar725._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar780._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar725._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar780._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar725._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar780._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar725._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar780._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar725._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar780._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar725._28_4_;
          bVar12 = (bool)(bVar29 & 1);
          auVar780._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar725._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar780._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar725._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar780._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar725._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar780._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar725._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar780._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar725._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar780._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar725._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar780._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar725._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar780._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar725._60_4_;
          auVar722 = vfmadd231ps_avx512f(auVar722,auVar780,auVar718);
          auVar722 = vfmadd231ps_avx512f(auVar722,auVar719,auVar724);
          uVar47 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar472),2);
          auVar722 = vfmadd231ps_avx512f(auVar722,auVar720,auVar780);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar781._0_4_ = (uint)bVar12 * in_ZMM29._0_4_ | (uint)!bVar12 * auVar722._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar781._4_4_ = (uint)bVar12 * in_ZMM29._4_4_ | (uint)!bVar12 * auVar722._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar781._8_4_ = (uint)bVar12 * in_ZMM29._8_4_ | (uint)!bVar12 * auVar722._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar781._12_4_ = (uint)bVar12 * in_ZMM29._12_4_ | (uint)!bVar12 * auVar722._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar781._16_4_ = (uint)bVar12 * in_ZMM29._16_4_ | (uint)!bVar12 * auVar722._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar781._20_4_ = (uint)bVar12 * in_ZMM29._20_4_ | (uint)!bVar12 * auVar722._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar781._24_4_ = (uint)bVar12 * in_ZMM29._24_4_ | (uint)!bVar12 * auVar722._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar781._28_4_ = (uint)bVar12 * in_ZMM29._28_4_ | (uint)!bVar12 * auVar722._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar781._32_4_ = (uint)bVar12 * in_ZMM29._32_4_ | (uint)!bVar12 * auVar722._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar781._36_4_ = (uint)bVar12 * in_ZMM29._36_4_ | (uint)!bVar12 * auVar722._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar781._40_4_ = (uint)bVar12 * in_ZMM29._40_4_ | (uint)!bVar12 * auVar722._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar781._44_4_ = (uint)bVar12 * in_ZMM29._44_4_ | (uint)!bVar12 * auVar722._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar781._48_4_ = (uint)bVar12 * in_ZMM29._48_4_ | (uint)!bVar12 * auVar722._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar781._52_4_ = (uint)bVar12 * in_ZMM29._52_4_ | (uint)!bVar12 * auVar722._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar781._56_4_ = (uint)bVar12 * in_ZMM29._56_4_ | (uint)!bVar12 * auVar722._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar781._60_4_ = (uint)bVar12 * in_ZMM29._60_4_ | (uint)!bVar12 * auVar722._60_4_;
          fVar890 = *ptr1;
          auVar359._4_4_ = fVar890;
          auVar359._0_4_ = fVar890;
          auVar359._8_4_ = fVar890;
          auVar359._12_4_ = fVar890;
          auVar359._16_4_ = fVar890;
          auVar359._20_4_ = fVar890;
          auVar359._24_4_ = fVar890;
          auVar359._28_4_ = fVar890;
          auVar359._32_4_ = fVar890;
          auVar359._36_4_ = fVar890;
          auVar359._40_4_ = fVar890;
          auVar359._44_4_ = fVar890;
          auVar359._48_4_ = fVar890;
          auVar359._52_4_ = fVar890;
          auVar359._56_4_ = fVar890;
          auVar359._60_4_ = fVar890;
          auVar722 = vmulps_avx512f(auVar781,auVar359);
          auVar722 = vminps_avx512f(auVar722,(undefined1  [64])afVar408);
          auVar722 = vmaxps_avx512f(auVar722,(undefined1  [64])afVar409);
          auVar723 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar722,auVar734);
          auVar724 = vrndscaleps_avx512f(auVar723,1);
          uVar47 = vcmpps_avx512f(auVar723,auVar724,1);
          auVar723 = vsubps_avx512f(auVar724,(undefined1  [64])afVar407);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar782._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar724._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar782._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar724._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar782._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar724._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar782._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar724._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar782._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar724._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar782._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar724._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar782._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar724._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar782._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar724._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar782._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar724._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar782._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar724._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar782._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar724._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar782._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar724._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar782._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar724._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar782._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar724._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar782._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar724._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar782._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar724._60_4_;
          auVar722 = vfmadd231ps_avx512f(auVar722,auVar782,auVar721);
          auVar722 = vfmadd231ps_avx512f(auVar722,auVar782,auVar717);
          auVar723 = vfmadd213ps_avx512f(auVar722,(undefined1  [64])afVar411,
                                         (undefined1  [64])afVar412);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar413);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar414);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar415);
          auVar724 = vmulps_avx512f(auVar722,auVar722);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,auVar734);
          auVar722 = vfmadd213ps_avx512f(auVar723,auVar724,auVar722);
          auVar723 = vcvttps2dq_avx512f(auVar782);
          auVar722 = vaddps_avx512f(auVar722,(undefined1  [64])afVar407);
          auVar723 = vpaddd_avx512f(auVar723,auVar716);
          auVar723 = vpslld_avx512f(auVar723,0x17);
          auVar722 = vmulps_avx512f(auVar722,auVar723);
          *(undefined1 (*) [64])outptr = auVar722;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar427 = uVar427 - 1;
          auVar442 = auVar519;
          auVar674 = auVar678;
        } while (uVar427 != 0);
      }
      afVar423 = _ps512_cephes_log_p8;
      afVar422 = _ps512_cephes_log_p7;
      afVar421 = _ps512_cephes_log_p6;
      afVar420 = _ps512_cephes_log_p5;
      afVar419 = _ps512_cephes_log_p4;
      afVar418 = _ps512_cephes_log_p3;
      afVar417 = _ps512_cephes_log_p2;
      afVar416 = _ps512_cephes_log_p1;
      afVar415 = ::_ps512_cephes_exp_p4;
      afVar414 = ::_ps512_cephes_exp_p3;
      afVar413 = ::_ps512_cephes_exp_p2;
      afVar412 = ::_ps512_cephes_exp_p1;
      afVar411 = ::_ps512_cephes_exp_p0;
      afVar410 = ::_ps512_cephes_LOG2EF;
      afVar409 = ::_ps512_exp_lo;
      afVar408 = ::_ps512_exp_hi;
      afVar407 = ::_ps512_1;
      if (iVar424 == 8) {
        uVar427 = 0;
        if (1 < (int)uVar425) {
          auVar674 = ::_ps512_1._0_32_;
          auVar734 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar716 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar717 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar718 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
          auVar719 = vpxord_avx512f(auVar734,auVar717);
          auVar720 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
          auVar442 = ::_ps512_exp_lo._0_16_;
          auVar721 = vpxord_avx512f(auVar720,auVar717);
          auVar717 = vpxord_avx512f(auVar718,auVar717);
          iVar426 = 1;
          auVar472 = vxorps_avx512vl(auVar472,auVar472);
          in_ZMM29 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
          do {
            auVar722 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,
                                      (undefined1  [64])_ps512_min_norm_pos);
            auVar723 = vpsrld_avx512f(auVar722,0x17);
            auVar722 = vpternlogd_avx512f(auVar722,auVar734,(undefined1  [64])_ps512_inv_mant_mask,
                                          0xec);
            uVar47 = vcmpps_avx512f(auVar722,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar724 = vsubps_avx512f(auVar722,(undefined1  [64])afVar407);
            auVar722 = vaddps_avx512f(auVar724,auVar722);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar783._0_4_ = (uint)bVar12 * auVar722._0_4_ | (uint)!bVar12 * auVar724._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar783._4_4_ = (uint)bVar12 * auVar722._4_4_ | (uint)!bVar12 * auVar724._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar783._8_4_ = (uint)bVar12 * auVar722._8_4_ | (uint)!bVar12 * auVar724._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar783._12_4_ = (uint)bVar12 * auVar722._12_4_ | (uint)!bVar12 * auVar724._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar783._16_4_ = (uint)bVar12 * auVar722._16_4_ | (uint)!bVar12 * auVar724._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar783._20_4_ = (uint)bVar12 * auVar722._20_4_ | (uint)!bVar12 * auVar724._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar783._24_4_ = (uint)bVar12 * auVar722._24_4_ | (uint)!bVar12 * auVar724._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar783._28_4_ = (uint)bVar12 * auVar722._28_4_ | (uint)!bVar12 * auVar724._28_4_;
            bVar29 = (byte)(uVar47 >> 8);
            bVar12 = (bool)(bVar29 & 1);
            auVar783._32_4_ = (uint)bVar12 * auVar722._32_4_ | (uint)!bVar12 * auVar724._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar783._36_4_ = (uint)bVar12 * auVar722._36_4_ | (uint)!bVar12 * auVar724._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar783._40_4_ = (uint)bVar12 * auVar722._40_4_ | (uint)!bVar12 * auVar724._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar783._44_4_ = (uint)bVar12 * auVar722._44_4_ | (uint)!bVar12 * auVar724._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar783._48_4_ = (uint)bVar12 * auVar722._48_4_ | (uint)!bVar12 * auVar724._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar783._52_4_ = (uint)bVar12 * auVar722._52_4_ | (uint)!bVar12 * auVar724._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar783._56_4_ = (uint)bVar12 * auVar722._56_4_ | (uint)!bVar12 * auVar724._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar783._60_4_ = (uint)bVar12 * auVar722._60_4_ | (uint)!bVar12 * auVar724._60_4_;
            auVar722 = vfmadd132ps_avx512f(auVar783,(undefined1  [64])afVar416,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar783,(undefined1  [64])afVar417);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar783,(undefined1  [64])afVar418);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar783,(undefined1  [64])afVar419);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar783,(undefined1  [64])afVar420);
            auVar724 = vmulps_avx512f(auVar783,auVar783);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar783,(undefined1  [64])afVar421);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar783,(undefined1  [64])afVar422);
            auVar725 = vmulps_avx512f(auVar724,auVar783);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar783,(undefined1  [64])afVar423);
            auVar722 = vfmadd213ps_avx512f(auVar725,auVar722,auVar783);
            fVar890 = *ptr1;
            uVar430 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar472),2);
            auVar677 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
            auVar723 = vpsubd_avx512f(auVar723,auVar716);
            auVar725 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar677,
                                  1);
            auVar723 = vcvtdq2ps_avx512f(auVar723);
            auVar726 = vaddps_avx512f(auVar723,(undefined1  [64])afVar407);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar784._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar726._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar784._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar726._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar784._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar726._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar784._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar726._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar784._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar726._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar784._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar726._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar784._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar726._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar784._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar726._28_4_;
            bVar12 = (bool)(bVar29 & 1);
            auVar784._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar726._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar784._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar726._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar784._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar726._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar784._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar726._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar784._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar726._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar784._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar726._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar784._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar726._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar784._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar726._60_4_;
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar784,auVar718);
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar719,auVar724);
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar720,auVar784);
            bVar12 = (bool)((byte)uVar430 & 1);
            auVar785._0_4_ = (uint)bVar12 * in_ZMM29._0_4_ | (uint)!bVar12 * auVar722._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar785._4_4_ = (uint)bVar12 * in_ZMM29._4_4_ | (uint)!bVar12 * auVar722._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar785._8_4_ = (uint)bVar12 * in_ZMM29._8_4_ | (uint)!bVar12 * auVar722._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar785._12_4_ = (uint)bVar12 * in_ZMM29._12_4_ | (uint)!bVar12 * auVar722._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar785._16_4_ = (uint)bVar12 * in_ZMM29._16_4_ | (uint)!bVar12 * auVar722._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar785._20_4_ = (uint)bVar12 * in_ZMM29._20_4_ | (uint)!bVar12 * auVar722._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar785._24_4_ = (uint)bVar12 * in_ZMM29._24_4_ | (uint)!bVar12 * auVar722._24_4_;
            bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
            auVar785._28_4_ = (uint)bVar12 * in_ZMM29._28_4_ | (uint)!bVar12 * auVar722._28_4_;
            bVar12 = (bool)((byte)(uVar430 >> 8) & 1);
            auVar785._32_4_ = (uint)bVar12 * in_ZMM29._32_4_ | (uint)!bVar12 * auVar722._32_4_;
            bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
            auVar785._36_4_ = (uint)bVar12 * in_ZMM29._36_4_ | (uint)!bVar12 * auVar722._36_4_;
            bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
            auVar785._40_4_ = (uint)bVar12 * in_ZMM29._40_4_ | (uint)!bVar12 * auVar722._40_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
            auVar785._44_4_ = (uint)bVar12 * in_ZMM29._44_4_ | (uint)!bVar12 * auVar722._44_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
            auVar785._48_4_ = (uint)bVar12 * in_ZMM29._48_4_ | (uint)!bVar12 * auVar722._48_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
            auVar785._52_4_ = (uint)bVar12 * in_ZMM29._52_4_ | (uint)!bVar12 * auVar722._52_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
            auVar785._56_4_ = (uint)bVar12 * in_ZMM29._56_4_ | (uint)!bVar12 * auVar722._56_4_;
            bVar12 = SUB81(uVar430 >> 0xf,0);
            auVar785._60_4_ = (uint)bVar12 * in_ZMM29._60_4_ | (uint)!bVar12 * auVar722._60_4_;
            auVar722 = vmulps_avx512f(auVar785,auVar725);
            auVar722 = vminps_avx512f(auVar722,(undefined1  [64])afVar408);
            auVar722 = vmaxps_avx512f(auVar722,(undefined1  [64])afVar409);
            auVar723 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar722,auVar734);
            auVar724 = vrndscaleps_avx512f(auVar723,1);
            uVar47 = vcmpps_avx512f(auVar723,auVar724,1);
            auVar723 = vsubps_avx512f(auVar724,(undefined1  [64])afVar407);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar786._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar724._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar786._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar724._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar786._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar724._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar786._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar724._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar786._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar724._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar786._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar724._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar786._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar724._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar786._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar724._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            auVar786._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar724._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar786._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar724._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar786._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar724._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar786._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar724._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar786._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar724._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar786._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar724._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar786._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar724._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar786._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar724._60_4_;
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar786,auVar721);
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar786,auVar717);
            auVar723 = vfmadd213ps_avx512f(auVar722,(undefined1  [64])afVar411,
                                           (undefined1  [64])afVar412);
            auVar724 = vmulps_avx512f(auVar722,auVar722);
            auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar413);
            auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar414);
            auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar415);
            auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,auVar734);
            auVar722 = vfmadd213ps_avx512f(auVar723,auVar724,auVar722);
            auVar722 = vaddps_avx512f(auVar722,(undefined1  [64])afVar407);
            auVar723 = vcvttps2dq_avx512f(auVar786);
            auVar723 = vpaddd_avx512f(auVar723,auVar716);
            auVar723 = vpslld_avx512f(auVar723,0x17);
            auVar722 = vmulps_avx512f(auVar722,auVar723);
            *(undefined1 (*) [64])outptr = auVar722;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar426 = iVar426 + 2;
          } while (iVar426 < (int)uVar425);
          uVar427 = uVar425 & 0x7ffffffe;
        }
        iVar426 = uVar425 - uVar427;
        if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
          auVar1139._8_4_ = 0xffffff82;
          auVar1139._0_8_ = 0xffffff82ffffff82;
          auVar1139._12_4_ = 0xffffff82;
          auVar1139._16_4_ = 0xffffff82;
          auVar1139._20_4_ = 0xffffff82;
          auVar1139._24_4_ = 0xffffff82;
          auVar1139._28_4_ = 0xffffff82;
          auVar1200._8_4_ = 0x3f3504f3;
          auVar1200._0_8_ = 0x3f3504f33f3504f3;
          auVar1200._12_4_ = 0x3f3504f3;
          auVar1200._16_4_ = 0x3f3504f3;
          auVar1200._20_4_ = 0x3f3504f3;
          auVar1200._24_4_ = 0x3f3504f3;
          auVar1200._28_4_ = 0x3f3504f3;
          auVar1256._8_4_ = 0xbf800000;
          auVar1256._0_8_ = 0xbf800000bf800000;
          auVar1256._12_4_ = 0xbf800000;
          auVar1256._16_4_ = 0xbf800000;
          auVar1256._20_4_ = 0xbf800000;
          auVar1256._24_4_ = 0xbf800000;
          auVar1256._28_4_ = 0xbf800000;
          auVar1318._8_4_ = 0x3f800000;
          auVar1318._0_8_ = 0x3f8000003f800000;
          auVar1318._12_4_ = 0x3f800000;
          auVar1318._16_4_ = 0x3f800000;
          auVar1318._20_4_ = 0x3f800000;
          auVar1318._24_4_ = 0x3f800000;
          auVar1318._28_4_ = 0x3f800000;
          auVar1376._8_4_ = 0x3d9021bb;
          auVar1376._0_8_ = 0x3d9021bb3d9021bb;
          auVar1376._12_4_ = 0x3d9021bb;
          auVar1376._16_4_ = 0x3d9021bb;
          auVar1376._20_4_ = 0x3d9021bb;
          auVar1376._24_4_ = 0x3d9021bb;
          auVar1376._28_4_ = 0x3d9021bb;
          auVar1432._8_4_ = 0xbdebd1b8;
          auVar1432._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar1432._12_4_ = 0xbdebd1b8;
          auVar1432._16_4_ = 0xbdebd1b8;
          auVar1432._20_4_ = 0xbdebd1b8;
          auVar1432._24_4_ = 0xbdebd1b8;
          auVar1432._28_4_ = 0xbdebd1b8;
          auVar1486._8_4_ = 0x3def251a;
          auVar1486._0_8_ = 0x3def251a3def251a;
          auVar1486._12_4_ = 0x3def251a;
          auVar1486._16_4_ = 0x3def251a;
          auVar1486._20_4_ = 0x3def251a;
          auVar1486._24_4_ = 0x3def251a;
          auVar1486._28_4_ = 0x3def251a;
          auVar1540._8_4_ = 0xbdfe5d4f;
          auVar1540._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar1540._12_4_ = 0xbdfe5d4f;
          auVar1540._16_4_ = 0xbdfe5d4f;
          auVar1540._20_4_ = 0xbdfe5d4f;
          auVar1540._24_4_ = 0xbdfe5d4f;
          auVar1540._28_4_ = 0xbdfe5d4f;
          auVar1594._8_4_ = 0x3e11e9bf;
          auVar1594._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar1594._12_4_ = 0x3e11e9bf;
          auVar1594._16_4_ = 0x3e11e9bf;
          auVar1594._20_4_ = 0x3e11e9bf;
          auVar1594._24_4_ = 0x3e11e9bf;
          auVar1594._28_4_ = 0x3e11e9bf;
          auVar1648._8_4_ = 0xbe2aae50;
          auVar1648._0_8_ = 0xbe2aae50be2aae50;
          auVar1648._12_4_ = 0xbe2aae50;
          auVar1648._16_4_ = 0xbe2aae50;
          auVar1648._20_4_ = 0xbe2aae50;
          auVar1648._24_4_ = 0xbe2aae50;
          auVar1648._28_4_ = 0xbe2aae50;
          auVar1702._8_4_ = 0x3e4cceac;
          auVar1702._0_8_ = 0x3e4cceac3e4cceac;
          auVar1702._12_4_ = 0x3e4cceac;
          auVar1702._16_4_ = 0x3e4cceac;
          auVar1702._20_4_ = 0x3e4cceac;
          auVar1702._24_4_ = 0x3e4cceac;
          auVar1702._28_4_ = 0x3e4cceac;
          auVar1753._8_4_ = 0xbe7ffffc;
          auVar1753._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar1753._12_4_ = 0xbe7ffffc;
          auVar1753._16_4_ = 0xbe7ffffc;
          auVar1753._20_4_ = 0xbe7ffffc;
          auVar1753._24_4_ = 0xbe7ffffc;
          auVar1753._28_4_ = 0xbe7ffffc;
          auVar1804._8_4_ = 0x3eaaaaaa;
          auVar1804._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar1804._12_4_ = 0x3eaaaaaa;
          auVar1804._16_4_ = 0x3eaaaaaa;
          auVar1804._20_4_ = 0x3eaaaaaa;
          auVar1804._24_4_ = 0x3eaaaaaa;
          auVar1804._28_4_ = 0x3eaaaaaa;
          auVar677 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar678 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar442 = vxorps_avx512vl(auVar442,auVar442);
          auVar674 = vpcmpeqd_avx2(auVar674,auVar674);
          auVar679 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar680 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar683 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar684 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar685 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar701 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar565 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar566 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar472 = auVar566._0_16_;
          auVar567 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          in_ZMM29 = ZEXT3264(auVar567);
          do {
            auVar276._8_4_ = 0x800000;
            auVar276._0_8_ = 0x80000000800000;
            auVar276._12_4_ = 0x800000;
            auVar276._16_4_ = 0x800000;
            auVar276._20_4_ = 0x800000;
            auVar276._24_4_ = 0x800000;
            auVar276._28_4_ = 0x800000;
            auVar568 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar276);
            auVar569 = vpsrld_avx512vl(auVar568,0x17);
            auVar999._8_4_ = 0x807fffff;
            auVar999._0_8_ = 0x807fffff807fffff;
            auVar999._12_4_ = 0x807fffff;
            auVar999._16_4_ = 0x807fffff;
            auVar999._20_4_ = 0x807fffff;
            auVar999._24_4_ = 0x807fffff;
            auVar999._28_4_ = 0x807fffff;
            auVar277._8_4_ = 0x3f000000;
            auVar277._0_8_ = 0x3f0000003f000000;
            auVar277._12_4_ = 0x3f000000;
            auVar277._16_4_ = 0x3f000000;
            auVar277._20_4_ = 0x3f000000;
            auVar277._24_4_ = 0x3f000000;
            auVar277._28_4_ = 0x3f000000;
            auVar568 = vpternlogd_avx512vl(auVar568,auVar999,auVar277,0xea);
            uVar47 = vcmpps_avx512vl(auVar568,auVar1200,1);
            auVar570 = vaddps_avx512vl(auVar568,auVar1256);
            auVar568 = vaddps_avx512vl(auVar570,auVar568);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar609._0_4_ = (uint)bVar12 * auVar568._0_4_ | (uint)!bVar12 * auVar570._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar609._4_4_ = (uint)bVar12 * auVar568._4_4_ | (uint)!bVar12 * auVar570._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar609._8_4_ = (uint)bVar12 * auVar568._8_4_ | (uint)!bVar12 * auVar570._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar609._12_4_ = (uint)bVar12 * auVar568._12_4_ | (uint)!bVar12 * auVar570._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar609._16_4_ = (uint)bVar12 * auVar568._16_4_ | (uint)!bVar12 * auVar570._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar609._20_4_ = (uint)bVar12 * auVar568._20_4_ | (uint)!bVar12 * auVar570._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar609._24_4_ = (uint)bVar12 * auVar568._24_4_ | (uint)!bVar12 * auVar570._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar609._28_4_ = (uint)bVar12 * auVar568._28_4_ | (uint)!bVar12 * auVar570._28_4_;
            auVar568 = vfmadd213ps_avx512vl(auVar1376,auVar609,auVar1432);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar609,auVar1486);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar609,auVar1540);
            uVar430 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                                      ZEXT1632(auVar442),2);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar609,auVar1594);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar609,auVar1648);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar609,auVar1702);
            auVar570 = vmulps_avx512vl(auVar609,auVar609);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar609,auVar1753);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar609,auVar1804);
            auVar563 = vmulps_avx512vl(auVar570,auVar609);
            auVar568 = vmulps_avx512vl(auVar563,auVar568);
            auVar569 = vpaddd_avx512vl(auVar569,auVar1139);
            auVar569 = vcvtdq2ps_avx512vl(auVar569);
            auVar563 = vsubps_avx512vl(auVar569,auVar1318);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar610._0_4_ = (uint)bVar12 * auVar563._0_4_ | (uint)!bVar12 * auVar569._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar610._4_4_ = (uint)bVar12 * auVar563._4_4_ | (uint)!bVar12 * auVar569._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar610._8_4_ = (uint)bVar12 * auVar563._8_4_ | (uint)!bVar12 * auVar569._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar610._12_4_ = (uint)bVar12 * auVar563._12_4_ | (uint)!bVar12 * auVar569._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar610._16_4_ = (uint)bVar12 * auVar563._16_4_ | (uint)!bVar12 * auVar569._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar610._20_4_ = (uint)bVar12 * auVar563._20_4_ | (uint)!bVar12 * auVar569._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar610._24_4_ = (uint)bVar12 * auVar563._24_4_ | (uint)!bVar12 * auVar569._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar610._28_4_ = (uint)bVar12 * auVar563._28_4_ | (uint)!bVar12 * auVar569._28_4_;
            auVar568 = vfmadd231ps_avx512vl(auVar568,auVar610,auVar677);
            auVar568 = vfmsub231ps_avx512vl(auVar568,auVar678,auVar570);
            auVar568 = vsubps_avx(auVar568,auVar609);
            auVar568 = vfmsub231ps_avx512vl(auVar568,auVar562,auVar610);
            bVar12 = (bool)((byte)uVar430 & 1);
            auVar611._0_4_ = (uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar568._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar611._4_4_ = (uint)bVar12 * auVar674._4_4_ | (uint)!bVar12 * auVar568._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar611._8_4_ = (uint)bVar12 * auVar674._8_4_ | (uint)!bVar12 * auVar568._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar611._12_4_ = (uint)bVar12 * auVar674._12_4_ | (uint)!bVar12 * auVar568._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar611._16_4_ = (uint)bVar12 * auVar674._16_4_ | (uint)!bVar12 * auVar568._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar611._20_4_ = (uint)bVar12 * auVar674._20_4_ | (uint)!bVar12 * auVar568._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar611._24_4_ = (uint)bVar12 * auVar674._24_4_ | (uint)!bVar12 * auVar568._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar611._28_4_ = (uint)bVar12 * auVar674._28_4_ | (uint)!bVar12 * auVar568._28_4_;
            fVar890 = *ptr1;
            auVar278._4_4_ = fVar890;
            auVar278._0_4_ = fVar890;
            auVar278._8_4_ = fVar890;
            auVar278._12_4_ = fVar890;
            auVar278._16_4_ = fVar890;
            auVar278._20_4_ = fVar890;
            auVar278._24_4_ = fVar890;
            auVar278._28_4_ = fVar890;
            auVar568 = vmulps_avx512vl(auVar611,auVar278);
            auVar568 = vminps_avx512vl(auVar568,auVar679);
            auVar568 = vmaxps_avx512vl(auVar568,auVar680);
            auVar569 = vfmadd231ps_avx512vl(auVar678,auVar568,auVar683);
            auVar570 = vrndscaleps_avx512vl(auVar569,1);
            uVar47 = vcmpps_avx512vl(auVar569,auVar570,1);
            auVar569 = vsubps_avx512vl(auVar570,auVar1318);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar612._0_4_ = (uint)bVar12 * auVar569._0_4_ | (uint)!bVar12 * auVar570._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar612._4_4_ = (uint)bVar12 * auVar569._4_4_ | (uint)!bVar12 * auVar570._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar612._8_4_ = (uint)bVar12 * auVar569._8_4_ | (uint)!bVar12 * auVar570._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar612._12_4_ = (uint)bVar12 * auVar569._12_4_ | (uint)!bVar12 * auVar570._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar612._16_4_ = (uint)bVar12 * auVar569._16_4_ | (uint)!bVar12 * auVar570._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar612._20_4_ = (uint)bVar12 * auVar569._20_4_ | (uint)!bVar12 * auVar570._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar612._24_4_ = (uint)bVar12 * auVar569._24_4_ | (uint)!bVar12 * auVar570._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar612._28_4_ = (uint)bVar12 * auVar569._28_4_ | (uint)!bVar12 * auVar570._28_4_;
            auVar568 = vfmsub231ps_avx512vl(auVar568,auVar612,auVar562);
            auVar568 = vfnmsub231ps_avx512vl(auVar568,auVar612,auVar677);
            auVar569 = vfmadd213ps_avx512vl(auVar684,auVar568,auVar685);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar701);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar565);
            auVar570 = vmulps_avx512vl(auVar568,auVar568);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar566);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar678);
            auVar568 = vfmadd213ps_avx512vl(auVar569,auVar570,auVar568);
            auVar569 = vcvttps2dq_avx512vl(auVar612);
            auVar569 = vpslld_avx2(auVar569,0x17);
            auVar569 = vpaddd_avx512vl(auVar569,auVar567);
            auVar460 = vfmadd213ps_fma(auVar569,auVar568,auVar569);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar460);
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar426 = iVar426 + -1;
          } while (iVar426 != 0);
        }
      }
      afVar422 = _ps512_cephes_log_p8;
      afVar421 = _ps512_cephes_log_p7;
      afVar420 = _ps512_cephes_log_p6;
      afVar419 = _ps512_cephes_log_p5;
      afVar418 = _ps512_cephes_log_p4;
      afVar417 = _ps512_cephes_log_p3;
      afVar416 = _ps512_cephes_log_p2;
      afVar415 = ::_ps512_cephes_exp_p4;
      afVar414 = ::_ps512_cephes_exp_p3;
      afVar413 = ::_ps512_cephes_exp_p2;
      afVar412 = ::_ps512_cephes_exp_p1;
      afVar411 = ::_ps512_cephes_exp_p0;
      afVar410 = ::_ps512_cephes_LOG2EF;
      afVar409 = ::_ps512_exp_lo;
      afVar408 = ::_ps512_exp_hi;
      afVar407 = ::_ps512_1;
      if (iVar424 != 4) {
        return;
      }
      uVar427 = 0;
      if (3 < (int)uVar425) {
        auVar674 = ::_ps512_1._0_32_;
        auVar734 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar716 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar717 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar718 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar719 = vpxord_avx512f(auVar734,auVar717);
        auVar720 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar442 = ::_ps512_exp_lo._0_16_;
        auVar721 = vpxord_avx512f(auVar720,auVar717);
        auVar717 = vpxord_avx512f(auVar718,auVar717);
        iVar424 = 3;
        auVar460 = vxorps_avx512vl(auVar472,auVar472);
        auVar722 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
        do {
          auVar723 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,(undefined1  [64])_ps512_min_norm_pos)
          ;
          auVar724 = vpsrld_avx512f(auVar723,0x17);
          auVar723 = vpternlogd_avx512f(auVar723,auVar734,(undefined1  [64])_ps512_inv_mant_mask,
                                        0xec);
          uVar47 = vcmpps_avx512f(auVar723,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar725 = vsubps_avx512f(auVar723,(undefined1  [64])afVar407);
          fVar890 = ptr1[2];
          auVar1257._4_4_ = fVar890;
          auVar1257._0_4_ = fVar890;
          auVar1257._8_4_ = fVar890;
          auVar1257._12_4_ = fVar890;
          auVar723 = vaddps_avx512f(auVar725,auVar723);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar787._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar725._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar787._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar725._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar787._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar725._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar787._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar725._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar787._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar725._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar787._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar725._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar787._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar725._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar787._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar725._28_4_;
          bVar29 = (byte)(uVar47 >> 8);
          bVar12 = (bool)(bVar29 & 1);
          auVar787._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar725._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar787._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar725._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar787._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar725._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar787._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar725._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar787._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar725._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar787._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar725._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar787._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar725._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar787._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar725._60_4_;
          fVar890 = ptr1[3];
          auVar1257._20_4_ = fVar890;
          auVar1257._16_4_ = fVar890;
          auVar1257._24_4_ = fVar890;
          auVar1257._28_4_ = fVar890;
          auVar723 = vfmadd132ps_avx512f(auVar787,(undefined1  [64])_ps512_cephes_log_p1,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar787,(undefined1  [64])afVar416);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar787,(undefined1  [64])afVar417);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar787,(undefined1  [64])afVar418);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar787,(undefined1  [64])afVar419);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar787,(undefined1  [64])afVar420);
          auVar725 = vmulps_avx512f(auVar787,auVar787);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar787,(undefined1  [64])afVar421);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar787,(undefined1  [64])afVar422);
          auVar726 = vmulps_avx512f(auVar725,auVar787);
          auVar723 = vfmadd213ps_avx512f(auVar726,auVar723,auVar787);
          fVar890 = *ptr1;
          auVar461 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
          auVar677 = vinsertf32x4_avx512vl
                               (ZEXT1632(CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(fVar890,fVar890
                                                                                    )))),auVar461,1)
          ;
          uVar430 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar460),2);
          auVar724 = vpsubd_avx512f(auVar724,auVar716);
          auVar726 = vinsertf64x4_avx512f(ZEXT3264(auVar677),auVar1257,1);
          auVar724 = vcvtdq2ps_avx512f(auVar724);
          auVar727 = vaddps_avx512f(auVar724,(undefined1  [64])afVar407);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar788._0_4_ = (uint)bVar12 * auVar724._0_4_ | (uint)!bVar12 * auVar727._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar788._4_4_ = (uint)bVar12 * auVar724._4_4_ | (uint)!bVar12 * auVar727._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar788._8_4_ = (uint)bVar12 * auVar724._8_4_ | (uint)!bVar12 * auVar727._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar788._12_4_ = (uint)bVar12 * auVar724._12_4_ | (uint)!bVar12 * auVar727._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar788._16_4_ = (uint)bVar12 * auVar724._16_4_ | (uint)!bVar12 * auVar727._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar788._20_4_ = (uint)bVar12 * auVar724._20_4_ | (uint)!bVar12 * auVar727._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar788._24_4_ = (uint)bVar12 * auVar724._24_4_ | (uint)!bVar12 * auVar727._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar788._28_4_ = (uint)bVar12 * auVar724._28_4_ | (uint)!bVar12 * auVar727._28_4_;
          bVar12 = (bool)(bVar29 & 1);
          auVar788._32_4_ = (uint)bVar12 * auVar724._32_4_ | (uint)!bVar12 * auVar727._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar788._36_4_ = (uint)bVar12 * auVar724._36_4_ | (uint)!bVar12 * auVar727._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar788._40_4_ = (uint)bVar12 * auVar724._40_4_ | (uint)!bVar12 * auVar727._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar788._44_4_ = (uint)bVar12 * auVar724._44_4_ | (uint)!bVar12 * auVar727._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar788._48_4_ = (uint)bVar12 * auVar724._48_4_ | (uint)!bVar12 * auVar727._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar788._52_4_ = (uint)bVar12 * auVar724._52_4_ | (uint)!bVar12 * auVar727._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar788._56_4_ = (uint)bVar12 * auVar724._56_4_ | (uint)!bVar12 * auVar727._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar788._60_4_ = (uint)bVar12 * auVar724._60_4_ | (uint)!bVar12 * auVar727._60_4_;
          auVar723 = vfmadd231ps_avx512f(auVar723,auVar788,auVar718);
          auVar723 = vfmadd231ps_avx512f(auVar723,auVar719,auVar725);
          auVar723 = vfmadd231ps_avx512f(auVar723,auVar720,auVar788);
          bVar12 = (bool)((byte)uVar430 & 1);
          auVar789._0_4_ = (uint)bVar12 * auVar722._0_4_ | (uint)!bVar12 * auVar723._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar789._4_4_ = (uint)bVar12 * auVar722._4_4_ | (uint)!bVar12 * auVar723._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar789._8_4_ = (uint)bVar12 * auVar722._8_4_ | (uint)!bVar12 * auVar723._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar789._12_4_ = (uint)bVar12 * auVar722._12_4_ | (uint)!bVar12 * auVar723._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar789._16_4_ = (uint)bVar12 * auVar722._16_4_ | (uint)!bVar12 * auVar723._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar789._20_4_ = (uint)bVar12 * auVar722._20_4_ | (uint)!bVar12 * auVar723._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar789._24_4_ = (uint)bVar12 * auVar722._24_4_ | (uint)!bVar12 * auVar723._24_4_;
          bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
          auVar789._28_4_ = (uint)bVar12 * auVar722._28_4_ | (uint)!bVar12 * auVar723._28_4_;
          bVar12 = (bool)((byte)(uVar430 >> 8) & 1);
          auVar789._32_4_ = (uint)bVar12 * auVar722._32_4_ | (uint)!bVar12 * auVar723._32_4_;
          bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
          auVar789._36_4_ = (uint)bVar12 * auVar722._36_4_ | (uint)!bVar12 * auVar723._36_4_;
          bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
          auVar789._40_4_ = (uint)bVar12 * auVar722._40_4_ | (uint)!bVar12 * auVar723._40_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
          auVar789._44_4_ = (uint)bVar12 * auVar722._44_4_ | (uint)!bVar12 * auVar723._44_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
          auVar789._48_4_ = (uint)bVar12 * auVar722._48_4_ | (uint)!bVar12 * auVar723._48_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
          auVar789._52_4_ = (uint)bVar12 * auVar722._52_4_ | (uint)!bVar12 * auVar723._52_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
          auVar789._56_4_ = (uint)bVar12 * auVar722._56_4_ | (uint)!bVar12 * auVar723._56_4_;
          bVar12 = SUB81(uVar430 >> 0xf,0);
          auVar789._60_4_ = (uint)bVar12 * auVar722._60_4_ | (uint)!bVar12 * auVar723._60_4_;
          auVar723 = vmulps_avx512f(auVar789,auVar726);
          auVar723 = vminps_avx512f(auVar723,(undefined1  [64])afVar408);
          auVar723 = vmaxps_avx512f(auVar723,(undefined1  [64])afVar409);
          auVar724 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar723,auVar734);
          auVar725 = vrndscaleps_avx512f(auVar724,1);
          uVar47 = vcmpps_avx512f(auVar724,auVar725,1);
          auVar724 = vsubps_avx512f(auVar725,(undefined1  [64])afVar407);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar790._0_4_ = (uint)bVar12 * auVar724._0_4_ | (uint)!bVar12 * auVar725._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar790._4_4_ = (uint)bVar12 * auVar724._4_4_ | (uint)!bVar12 * auVar725._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar790._8_4_ = (uint)bVar12 * auVar724._8_4_ | (uint)!bVar12 * auVar725._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar790._12_4_ = (uint)bVar12 * auVar724._12_4_ | (uint)!bVar12 * auVar725._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar790._16_4_ = (uint)bVar12 * auVar724._16_4_ | (uint)!bVar12 * auVar725._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar790._20_4_ = (uint)bVar12 * auVar724._20_4_ | (uint)!bVar12 * auVar725._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar790._24_4_ = (uint)bVar12 * auVar724._24_4_ | (uint)!bVar12 * auVar725._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar790._28_4_ = (uint)bVar12 * auVar724._28_4_ | (uint)!bVar12 * auVar725._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar790._32_4_ = (uint)bVar12 * auVar724._32_4_ | (uint)!bVar12 * auVar725._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar790._36_4_ = (uint)bVar12 * auVar724._36_4_ | (uint)!bVar12 * auVar725._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar790._40_4_ = (uint)bVar12 * auVar724._40_4_ | (uint)!bVar12 * auVar725._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar790._44_4_ = (uint)bVar12 * auVar724._44_4_ | (uint)!bVar12 * auVar725._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar790._48_4_ = (uint)bVar12 * auVar724._48_4_ | (uint)!bVar12 * auVar725._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar790._52_4_ = (uint)bVar12 * auVar724._52_4_ | (uint)!bVar12 * auVar725._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar790._56_4_ = (uint)bVar12 * auVar724._56_4_ | (uint)!bVar12 * auVar725._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar790._60_4_ = (uint)bVar12 * auVar724._60_4_ | (uint)!bVar12 * auVar725._60_4_;
          auVar723 = vfmadd231ps_avx512f(auVar723,auVar790,auVar721);
          auVar723 = vfmadd231ps_avx512f(auVar723,auVar790,auVar717);
          auVar724 = vfmadd213ps_avx512f(auVar723,(undefined1  [64])afVar411,
                                         (undefined1  [64])afVar412);
          auVar725 = vmulps_avx512f(auVar723,auVar723);
          auVar724 = vfmadd213ps_avx512f(auVar724,auVar723,(undefined1  [64])afVar413);
          auVar724 = vfmadd213ps_avx512f(auVar724,auVar723,(undefined1  [64])afVar414);
          auVar724 = vfmadd213ps_avx512f(auVar724,auVar723,(undefined1  [64])afVar415);
          auVar724 = vfmadd213ps_avx512f(auVar724,auVar723,auVar734);
          auVar723 = vfmadd213ps_avx512f(auVar724,auVar725,auVar723);
          auVar723 = vaddps_avx512f(auVar723,(undefined1  [64])afVar407);
          auVar724 = vcvttps2dq_avx512f(auVar790);
          auVar724 = vpaddd_avx512f(auVar724,auVar716);
          auVar724 = vpslld_avx512f(auVar724,0x17);
          auVar723 = vmulps_avx512f(auVar723,auVar724);
          *(undefined1 (*) [64])outptr = auVar723;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 4;
        } while (iVar424 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffc;
      }
      auVar460 = auVar674._0_16_;
      if ((int)(uVar427 | 1) < (int)uVar425) {
        auVar1140._8_4_ = 0xffffff82;
        auVar1140._0_8_ = 0xffffff82ffffff82;
        auVar1140._12_4_ = 0xffffff82;
        auVar1140._16_4_ = 0xffffff82;
        auVar1140._20_4_ = 0xffffff82;
        auVar1140._24_4_ = 0xffffff82;
        auVar1140._28_4_ = 0xffffff82;
        auVar1201._8_4_ = 0x3f3504f3;
        auVar1201._0_8_ = 0x3f3504f33f3504f3;
        auVar1201._12_4_ = 0x3f3504f3;
        auVar1201._16_4_ = 0x3f3504f3;
        auVar1201._20_4_ = 0x3f3504f3;
        auVar1201._24_4_ = 0x3f3504f3;
        auVar1201._28_4_ = 0x3f3504f3;
        auVar1258._8_4_ = 0xbf800000;
        auVar1258._0_8_ = 0xbf800000bf800000;
        auVar1258._12_4_ = 0xbf800000;
        auVar1258._16_4_ = 0xbf800000;
        auVar1258._20_4_ = 0xbf800000;
        auVar1258._24_4_ = 0xbf800000;
        auVar1258._28_4_ = 0xbf800000;
        auVar1319._8_4_ = 0x3f800000;
        auVar1319._0_8_ = 0x3f8000003f800000;
        auVar1319._12_4_ = 0x3f800000;
        auVar1319._16_4_ = 0x3f800000;
        auVar1319._20_4_ = 0x3f800000;
        auVar1319._24_4_ = 0x3f800000;
        auVar1319._28_4_ = 0x3f800000;
        auVar1377._8_4_ = 0x3d9021bb;
        auVar1377._0_8_ = 0x3d9021bb3d9021bb;
        auVar1377._12_4_ = 0x3d9021bb;
        auVar1377._16_4_ = 0x3d9021bb;
        auVar1377._20_4_ = 0x3d9021bb;
        auVar1377._24_4_ = 0x3d9021bb;
        auVar1377._28_4_ = 0x3d9021bb;
        auVar1433._8_4_ = 0xbdebd1b8;
        auVar1433._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1433._12_4_ = 0xbdebd1b8;
        auVar1433._16_4_ = 0xbdebd1b8;
        auVar1433._20_4_ = 0xbdebd1b8;
        auVar1433._24_4_ = 0xbdebd1b8;
        auVar1433._28_4_ = 0xbdebd1b8;
        auVar1487._8_4_ = 0x3def251a;
        auVar1487._0_8_ = 0x3def251a3def251a;
        auVar1487._12_4_ = 0x3def251a;
        auVar1487._16_4_ = 0x3def251a;
        auVar1487._20_4_ = 0x3def251a;
        auVar1487._24_4_ = 0x3def251a;
        auVar1487._28_4_ = 0x3def251a;
        auVar1541._8_4_ = 0xbdfe5d4f;
        auVar1541._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1541._12_4_ = 0xbdfe5d4f;
        auVar1541._16_4_ = 0xbdfe5d4f;
        auVar1541._20_4_ = 0xbdfe5d4f;
        auVar1541._24_4_ = 0xbdfe5d4f;
        auVar1541._28_4_ = 0xbdfe5d4f;
        auVar1595._8_4_ = 0x3e11e9bf;
        auVar1595._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1595._12_4_ = 0x3e11e9bf;
        auVar1595._16_4_ = 0x3e11e9bf;
        auVar1595._20_4_ = 0x3e11e9bf;
        auVar1595._24_4_ = 0x3e11e9bf;
        auVar1595._28_4_ = 0x3e11e9bf;
        auVar1649._8_4_ = 0xbe2aae50;
        auVar1649._0_8_ = 0xbe2aae50be2aae50;
        auVar1649._12_4_ = 0xbe2aae50;
        auVar1649._16_4_ = 0xbe2aae50;
        auVar1649._20_4_ = 0xbe2aae50;
        auVar1649._24_4_ = 0xbe2aae50;
        auVar1649._28_4_ = 0xbe2aae50;
        auVar1703._8_4_ = 0x3e4cceac;
        auVar1703._0_8_ = 0x3e4cceac3e4cceac;
        auVar1703._12_4_ = 0x3e4cceac;
        auVar1703._16_4_ = 0x3e4cceac;
        auVar1703._20_4_ = 0x3e4cceac;
        auVar1703._24_4_ = 0x3e4cceac;
        auVar1703._28_4_ = 0x3e4cceac;
        auVar1754._8_4_ = 0xbe7ffffc;
        auVar1754._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1754._12_4_ = 0xbe7ffffc;
        auVar1754._16_4_ = 0xbe7ffffc;
        auVar1754._20_4_ = 0xbe7ffffc;
        auVar1754._24_4_ = 0xbe7ffffc;
        auVar1754._28_4_ = 0xbe7ffffc;
        auVar1805._8_4_ = 0x3eaaaaaa;
        auVar1805._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar1805._12_4_ = 0x3eaaaaaa;
        auVar1805._16_4_ = 0x3eaaaaaa;
        auVar1805._20_4_ = 0x3eaaaaaa;
        auVar1805._24_4_ = 0x3eaaaaaa;
        auVar1805._28_4_ = 0x3eaaaaaa;
        auVar677 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar678 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar442 = vxorps_avx512vl(auVar442,auVar442);
        auVar674 = vpcmpeqd_avx2(auVar674,auVar674);
        auVar460 = auVar674._0_16_;
        auVar679 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar680 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar683 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar684 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar685 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar701 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar565 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar566 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar567 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        uVar882 = uVar427;
        do {
          auVar279._8_4_ = 0x800000;
          auVar279._0_8_ = 0x80000000800000;
          auVar279._12_4_ = 0x800000;
          auVar279._16_4_ = 0x800000;
          auVar279._20_4_ = 0x800000;
          auVar279._24_4_ = 0x800000;
          auVar279._28_4_ = 0x800000;
          auVar568 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar279);
          auVar569 = vpsrld_avx512vl(auVar568,0x17);
          auVar1000._8_4_ = 0x807fffff;
          auVar1000._0_8_ = 0x807fffff807fffff;
          auVar1000._12_4_ = 0x807fffff;
          auVar1000._16_4_ = 0x807fffff;
          auVar1000._20_4_ = 0x807fffff;
          auVar1000._24_4_ = 0x807fffff;
          auVar1000._28_4_ = 0x807fffff;
          auVar280._8_4_ = 0x3f000000;
          auVar280._0_8_ = 0x3f0000003f000000;
          auVar280._12_4_ = 0x3f000000;
          auVar280._16_4_ = 0x3f000000;
          auVar280._20_4_ = 0x3f000000;
          auVar280._24_4_ = 0x3f000000;
          auVar280._28_4_ = 0x3f000000;
          auVar568 = vpternlogd_avx512vl(auVar568,auVar1000,auVar280,0xea);
          uVar47 = vcmpps_avx512vl(auVar568,auVar1201,1);
          auVar570 = vaddps_avx512vl(auVar568,auVar1258);
          auVar568 = vaddps_avx512vl(auVar570,auVar568);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar613._0_4_ = (uint)bVar12 * auVar568._0_4_ | (uint)!bVar12 * auVar570._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar613._4_4_ = (uint)bVar12 * auVar568._4_4_ | (uint)!bVar12 * auVar570._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar613._8_4_ = (uint)bVar12 * auVar568._8_4_ | (uint)!bVar12 * auVar570._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar613._12_4_ = (uint)bVar12 * auVar568._12_4_ | (uint)!bVar12 * auVar570._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar613._16_4_ = (uint)bVar12 * auVar568._16_4_ | (uint)!bVar12 * auVar570._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar613._20_4_ = (uint)bVar12 * auVar568._20_4_ | (uint)!bVar12 * auVar570._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar613._24_4_ = (uint)bVar12 * auVar568._24_4_ | (uint)!bVar12 * auVar570._24_4_;
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar613._28_4_ = (uint)bVar12 * auVar568._28_4_ | (uint)!bVar12 * auVar570._28_4_;
          auVar568 = vfmadd213ps_avx512vl(auVar1377,auVar613,auVar1433);
          auVar568 = vfmadd213ps_avx512vl(auVar568,auVar613,auVar1487);
          uVar430 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                                    ZEXT1632(auVar442),2);
          auVar568 = vfmadd213ps_avx512vl(auVar568,auVar613,auVar1541);
          auVar568 = vfmadd213ps_avx512vl(auVar568,auVar613,auVar1595);
          auVar568 = vfmadd213ps_avx512vl(auVar568,auVar613,auVar1649);
          auVar570 = vmulps_avx512vl(auVar613,auVar613);
          auVar568 = vfmadd213ps_avx512vl(auVar568,auVar613,auVar1703);
          auVar568 = vfmadd213ps_avx512vl(auVar568,auVar613,auVar1754);
          auVar563 = vmulps_avx512vl(auVar570,auVar613);
          auVar568 = vfmadd213ps_avx512vl(auVar568,auVar613,auVar1805);
          auVar568 = vmulps_avx512vl(auVar563,auVar568);
          auVar569 = vpaddd_avx512vl(auVar569,auVar1140);
          auVar569 = vcvtdq2ps_avx512vl(auVar569);
          auVar563 = vsubps_avx512vl(auVar569,auVar1319);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar614._0_4_ = (uint)bVar12 * auVar563._0_4_ | (uint)!bVar12 * auVar569._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar614._4_4_ = (uint)bVar12 * auVar563._4_4_ | (uint)!bVar12 * auVar569._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar614._8_4_ = (uint)bVar12 * auVar563._8_4_ | (uint)!bVar12 * auVar569._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar614._12_4_ = (uint)bVar12 * auVar563._12_4_ | (uint)!bVar12 * auVar569._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar614._16_4_ = (uint)bVar12 * auVar563._16_4_ | (uint)!bVar12 * auVar569._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar614._20_4_ = (uint)bVar12 * auVar563._20_4_ | (uint)!bVar12 * auVar569._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar614._24_4_ = (uint)bVar12 * auVar563._24_4_ | (uint)!bVar12 * auVar569._24_4_;
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar614._28_4_ = (uint)bVar12 * auVar563._28_4_ | (uint)!bVar12 * auVar569._28_4_;
          auVar568 = vfmadd231ps_avx512vl(auVar568,auVar614,auVar677);
          auVar568 = vfmsub231ps_avx512vl(auVar568,auVar678,auVar570);
          auVar461 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          auVar568 = vsubps_avx(auVar568,auVar613);
          fVar890 = ptr1[1];
          auVar1029._4_4_ = fVar890;
          auVar1029._0_4_ = fVar890;
          auVar1029._8_4_ = fVar890;
          auVar1029._12_4_ = fVar890;
          auVar569 = vinsertf32x4_avx512vl(ZEXT1632(auVar461),auVar1029,1);
          auVar568 = vfmsub231ps_avx512vl(auVar568,auVar562,auVar614);
          bVar12 = (bool)((byte)uVar430 & 1);
          bVar13 = (bool)((byte)(uVar430 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar430 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar430 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar430 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar430 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar430 >> 6) & 1);
          bVar19 = SUB81(uVar430 >> 7,0);
          auVar375._4_4_ =
               (float)((uint)bVar13 * auVar674._4_4_ | (uint)!bVar13 * auVar568._4_4_) *
               auVar569._4_4_;
          auVar375._0_4_ =
               (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar568._0_4_) *
               auVar569._0_4_;
          auVar375._8_4_ =
               (float)((uint)bVar14 * auVar674._8_4_ | (uint)!bVar14 * auVar568._8_4_) *
               auVar569._8_4_;
          auVar375._12_4_ =
               (float)((uint)bVar15 * auVar674._12_4_ | (uint)!bVar15 * auVar568._12_4_) *
               auVar569._12_4_;
          auVar375._16_4_ =
               (float)((uint)bVar16 * auVar674._16_4_ | (uint)!bVar16 * auVar568._16_4_) *
               auVar569._16_4_;
          auVar375._20_4_ =
               (float)((uint)bVar17 * auVar674._20_4_ | (uint)!bVar17 * auVar568._20_4_) *
               auVar569._20_4_;
          auVar375._24_4_ =
               (float)((uint)bVar18 * auVar674._24_4_ | (uint)!bVar18 * auVar568._24_4_) *
               auVar569._24_4_;
          auVar375._28_4_ = (uint)bVar19 * auVar674._28_4_ | (uint)!bVar19 * auVar568._28_4_;
          auVar568 = vminps_avx512vl(auVar375,auVar679);
          auVar568 = vmaxps_avx512vl(auVar568,auVar680);
          auVar569 = vfmadd231ps_avx512vl(auVar678,auVar568,auVar683);
          auVar570 = vrndscaleps_avx512vl(auVar569,1);
          uVar47 = vcmpps_avx512vl(auVar569,auVar570,1);
          auVar569 = vsubps_avx512vl(auVar570,auVar1319);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar615._0_4_ = (uint)bVar12 * auVar569._0_4_ | (uint)!bVar12 * auVar570._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar615._4_4_ = (uint)bVar12 * auVar569._4_4_ | (uint)!bVar12 * auVar570._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar615._8_4_ = (uint)bVar12 * auVar569._8_4_ | (uint)!bVar12 * auVar570._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar615._12_4_ = (uint)bVar12 * auVar569._12_4_ | (uint)!bVar12 * auVar570._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar615._16_4_ = (uint)bVar12 * auVar569._16_4_ | (uint)!bVar12 * auVar570._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar615._20_4_ = (uint)bVar12 * auVar569._20_4_ | (uint)!bVar12 * auVar570._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar615._24_4_ = (uint)bVar12 * auVar569._24_4_ | (uint)!bVar12 * auVar570._24_4_;
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar615._28_4_ = (uint)bVar12 * auVar569._28_4_ | (uint)!bVar12 * auVar570._28_4_;
          auVar568 = vfmsub231ps_avx512vl(auVar568,auVar615,auVar562);
          auVar568 = vfnmsub231ps_avx512vl(auVar568,auVar615,auVar677);
          auVar569 = vfmadd213ps_avx512vl(auVar684,auVar568,auVar685);
          auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar701);
          auVar570 = vmulps_avx512vl(auVar568,auVar568);
          auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar565);
          auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar566);
          auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar678);
          auVar568 = vfmadd213ps_avx512vl(auVar569,auVar570,auVar568);
          auVar569 = vcvttps2dq_avx512vl(auVar615);
          auVar569 = vpslld_avx2(auVar569,0x17);
          auVar569 = vpaddd_avx512vl(auVar569,auVar567);
          auVar461 = vfmadd213ps_fma(auVar569,auVar568,auVar569);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar461);
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar427 = uVar882 + 2;
          iVar424 = uVar882 + 3;
          uVar882 = uVar427;
        } while (iVar424 < (int)uVar425);
      }
      iVar424 = uVar425 - uVar427;
      if (iVar424 == 0 || (int)uVar425 < (int)uVar427) {
        return;
      }
      lVar428 = 0;
      auVar1124._8_4_ = 0xffffff82;
      auVar1124._0_8_ = 0xffffff82ffffff82;
      auVar1124._12_4_ = 0xffffff82;
      auVar1176._8_4_ = 0x3f3504f3;
      auVar1176._0_8_ = 0x3f3504f33f3504f3;
      auVar1176._12_4_ = 0x3f3504f3;
      auVar1229._8_4_ = 0xbf800000;
      auVar1229._0_8_ = 0xbf800000bf800000;
      auVar1229._12_4_ = 0xbf800000;
      auVar1294._8_4_ = 0x3f800000;
      auVar1294._0_8_ = 0x3f8000003f800000;
      auVar1294._12_4_ = 0x3f800000;
      auVar959._8_4_ = 0x3d9021bb;
      auVar959._0_8_ = 0x3d9021bb3d9021bb;
      auVar959._12_4_ = 0x3d9021bb;
      auVar1411._8_4_ = 0xbdebd1b8;
      auVar1411._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1411._12_4_ = 0xbdebd1b8;
      auVar1465._8_4_ = 0x3def251a;
      auVar1465._0_8_ = 0x3def251a3def251a;
      auVar1465._12_4_ = 0x3def251a;
      auVar1519._8_4_ = 0xbdfe5d4f;
      auVar1519._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1519._12_4_ = 0xbdfe5d4f;
      auVar1573._8_4_ = 0x3e11e9bf;
      auVar1573._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1573._12_4_ = 0x3e11e9bf;
      auVar1627._8_4_ = 0xbe2aae50;
      auVar1627._0_8_ = 0xbe2aae50be2aae50;
      auVar1627._12_4_ = 0xbe2aae50;
      auVar1681._8_4_ = 0x3e4cceac;
      auVar1681._0_8_ = 0x3e4cceac3e4cceac;
      auVar1681._12_4_ = 0x3e4cceac;
      auVar1735._8_4_ = 0xbe7ffffc;
      auVar1735._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar1735._12_4_ = 0xbe7ffffc;
      auVar1786._8_4_ = 0x3eaaaaaa;
      auVar1786._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar1786._12_4_ = 0x3eaaaaaa;
      auVar461 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar519 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar472 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar464 = vxorps_avx512vl(auVar442,auVar442);
      auVar442 = vpcmpeqd_avx(auVar460,auVar460);
      auVar460 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar465 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar466 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar469 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar470 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar523 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar443 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar445 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      do {
        uVar47 = vcmpps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar428 * 4),
                                 auVar464,2);
        auVar137._8_4_ = 0x800000;
        auVar137._0_8_ = 0x80000000800000;
        auVar137._12_4_ = 0x800000;
        auVar446 = vmaxps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar428 * 4),
                                   auVar137);
        auVar447 = vpsrld_avx512vl(auVar446,0x17);
        auVar1041._8_4_ = 0x807fffff;
        auVar1041._0_8_ = 0x807fffff807fffff;
        auVar1041._12_4_ = 0x807fffff;
        auVar138._8_4_ = 0x3f000000;
        auVar138._0_8_ = 0x3f0000003f000000;
        auVar138._12_4_ = 0x3f000000;
        auVar446 = vpternlogd_avx512vl(auVar446,auVar1041,auVar138,0xea);
        uVar430 = vcmpps_avx512vl(auVar446,auVar1176,1);
        auVar439 = vaddps_avx512vl(auVar446,auVar1229);
        auVar446 = vaddps_avx512vl(auVar439,auVar446);
        bVar12 = (bool)((byte)uVar430 & 1);
        auVar501._0_4_ = (uint)bVar12 * auVar446._0_4_ | (uint)!bVar12 * auVar439._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar501._4_4_ = (uint)bVar12 * auVar446._4_4_ | (uint)!bVar12 * auVar439._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar501._8_4_ = (uint)bVar12 * auVar446._8_4_ | (uint)!bVar12 * auVar439._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar501._12_4_ = (uint)bVar12 * auVar446._12_4_ | (uint)!bVar12 * auVar439._12_4_;
        auVar439 = vmulps_avx512vl(auVar501,auVar501);
        auVar446 = vfmadd213ps_avx512vl(auVar959,auVar501,auVar1411);
        auVar446 = vfmadd213ps_avx512vl(auVar446,auVar501,auVar1465);
        auVar446 = vfmadd213ps_avx512vl(auVar446,auVar501,auVar1519);
        auVar446 = vfmadd213ps_avx512vl(auVar446,auVar501,auVar1573);
        auVar446 = vfmadd213ps_avx512vl(auVar446,auVar501,auVar1627);
        auVar446 = vfmadd213ps_avx512vl(auVar446,auVar501,auVar1681);
        auVar446 = vfmadd213ps_avx512vl(auVar446,auVar501,auVar1735);
        auVar446 = vfmadd213ps_avx512vl(auVar446,auVar501,auVar1786);
        auVar440 = vmulps_avx512vl(auVar439,auVar501);
        auVar1042._0_4_ = auVar440._0_4_ * auVar446._0_4_;
        auVar1042._4_4_ = auVar440._4_4_ * auVar446._4_4_;
        auVar1042._8_4_ = auVar440._8_4_ * auVar446._8_4_;
        auVar1042._12_4_ = auVar440._12_4_ * auVar446._12_4_;
        auVar446 = vpaddd_avx512vl(auVar447,auVar1124);
        auVar446 = vcvtdq2ps_avx(auVar446);
        auVar447 = vsubps_avx512vl(auVar446,auVar1294);
        bVar12 = (bool)((byte)uVar430 & 1);
        auVar502._0_4_ = (uint)bVar12 * auVar447._0_4_ | (uint)!bVar12 * auVar446._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar502._4_4_ = (uint)bVar12 * auVar447._4_4_ | (uint)!bVar12 * auVar446._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar502._8_4_ = (uint)bVar12 * auVar447._8_4_ | (uint)!bVar12 * auVar446._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar502._12_4_ = (uint)bVar12 * auVar447._12_4_ | (uint)!bVar12 * auVar446._12_4_;
        auVar446 = vfmadd231ps_avx512vl(auVar1042,auVar502,auVar461);
        auVar446 = vfmsub231ps_avx512vl(auVar446,auVar519,auVar439);
        auVar446 = vsubps_avx512vl(auVar446,auVar501);
        auVar446 = vfmsub231ps_avx512vl(auVar446,auVar472,auVar502);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar503._0_4_ = (uint)bVar12 * auVar442._0_4_ | (uint)!bVar12 * auVar446._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar503._4_4_ = (uint)bVar12 * auVar442._4_4_ | (uint)!bVar12 * auVar446._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar503._8_4_ = (uint)bVar12 * auVar442._8_4_ | (uint)!bVar12 * auVar446._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar503._12_4_ = (uint)bVar12 * auVar442._12_4_ | (uint)!bVar12 * auVar446._12_4_;
        uVar11 = *(undefined4 *)((long)ptr1 + lVar428);
        auVar139._4_4_ = uVar11;
        auVar139._0_4_ = uVar11;
        auVar139._8_4_ = uVar11;
        auVar139._12_4_ = uVar11;
        auVar446 = vmulps_avx512vl(auVar503,auVar139);
        auVar446 = vminps_avx512vl(auVar446,auVar460);
        auVar446 = vmaxps_avx512vl(auVar446,auVar465);
        auVar447 = vfmadd231ps_avx512vl(auVar519,auVar446,auVar466);
        auVar439 = vcvttps2dq_avx512vl(auVar447);
        auVar439 = vcvtdq2ps_avx512vl(auVar439);
        uVar47 = vcmpps_avx512vl(auVar447,auVar439,1);
        auVar447 = vsubps_avx512vl(auVar439,auVar1294);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar504._0_4_ = (uint)bVar12 * auVar447._0_4_ | (uint)!bVar12 * auVar439._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar504._4_4_ = (uint)bVar12 * auVar447._4_4_ | (uint)!bVar12 * auVar439._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar504._8_4_ = (uint)bVar12 * auVar447._8_4_ | (uint)!bVar12 * auVar439._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar504._12_4_ = (uint)bVar12 * auVar447._12_4_ | (uint)!bVar12 * auVar439._12_4_;
        auVar446 = vfmsub231ps_avx512vl(auVar446,auVar504,auVar472);
        auVar446 = vfnmsub231ps_avx512vl(auVar446,auVar504,auVar461);
        auVar1355._0_4_ = auVar446._0_4_ * auVar446._0_4_;
        auVar1355._4_4_ = auVar446._4_4_ * auVar446._4_4_;
        auVar1355._8_4_ = auVar446._8_4_ * auVar446._8_4_;
        auVar1355._12_4_ = auVar446._12_4_ * auVar446._12_4_;
        auVar447 = vfmadd213ps_avx512vl(auVar469,auVar446,auVar470);
        auVar447 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar523);
        auVar447 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar443);
        auVar447 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar444);
        auVar447 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar519);
        auVar446 = vfmadd213ps_avx512vl(auVar447,auVar1355,auVar446);
        auVar447 = vcvttps2dq_avx512vl(auVar504);
        auVar447 = vpslld_avx(auVar447,0x17);
        auVar447 = vpaddd_avx512vl(auVar447,auVar445);
        auVar446 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar447);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar446;
        lVar428 = lVar428 + 4;
        iVar424 = iVar424 + -1;
      } while (iVar424 != 0);
      return;
    }
    if (bw == 1) {
      uVar425 = 0;
      auVar674 = in_ZMM1._0_32_;
      if (0xf < (int)uVar427) {
        auVar734 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        in_ZMM4 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        in_ZMM5 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar716 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar717 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar718 = vpxord_avx512f(in_ZMM4,auVar716);
        auVar719 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar720 = vpxord_avx512f(auVar719,auVar716);
        auVar716 = vpxord_avx512f(auVar717,auVar716);
        iVar424 = 0xf;
        auVar442 = vxorps_avx512vl(auVar464,auVar464);
        auVar721 = vpternlogd_avx512f(in_ZMM30,in_ZMM30,in_ZMM30,0xff);
        do {
          auVar722 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,(undefined1  [64])_ps512_min_norm_pos)
          ;
          auVar723 = vpsrld_avx512f(auVar722,0x17);
          auVar722 = vpternlogd_avx512f(auVar722,in_ZMM4,(undefined1  [64])_ps512_inv_mant_mask,0xec
                                       );
          uVar47 = vcmpps_avx512f(auVar722,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar724 = vsubps_avx512f(auVar722,(undefined1  [64])afVar407);
          auVar722 = vaddps_avx512f(auVar724,auVar722);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar791._0_4_ = (uint)bVar12 * auVar722._0_4_ | (uint)!bVar12 * auVar724._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar791._4_4_ = (uint)bVar12 * auVar722._4_4_ | (uint)!bVar12 * auVar724._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar791._8_4_ = (uint)bVar12 * auVar722._8_4_ | (uint)!bVar12 * auVar724._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar791._12_4_ = (uint)bVar12 * auVar722._12_4_ | (uint)!bVar12 * auVar724._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar791._16_4_ = (uint)bVar12 * auVar722._16_4_ | (uint)!bVar12 * auVar724._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar791._20_4_ = (uint)bVar12 * auVar722._20_4_ | (uint)!bVar12 * auVar724._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar791._24_4_ = (uint)bVar12 * auVar722._24_4_ | (uint)!bVar12 * auVar724._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar791._28_4_ = (uint)bVar12 * auVar722._28_4_ | (uint)!bVar12 * auVar724._28_4_;
          bVar29 = (byte)(uVar47 >> 8);
          bVar12 = (bool)(bVar29 & 1);
          auVar791._32_4_ = (uint)bVar12 * auVar722._32_4_ | (uint)!bVar12 * auVar724._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar791._36_4_ = (uint)bVar12 * auVar722._36_4_ | (uint)!bVar12 * auVar724._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar791._40_4_ = (uint)bVar12 * auVar722._40_4_ | (uint)!bVar12 * auVar724._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar791._44_4_ = (uint)bVar12 * auVar722._44_4_ | (uint)!bVar12 * auVar724._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar791._48_4_ = (uint)bVar12 * auVar722._48_4_ | (uint)!bVar12 * auVar724._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar791._52_4_ = (uint)bVar12 * auVar722._52_4_ | (uint)!bVar12 * auVar724._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar791._56_4_ = (uint)bVar12 * auVar722._56_4_ | (uint)!bVar12 * auVar724._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar791._60_4_ = (uint)bVar12 * auVar722._60_4_ | (uint)!bVar12 * auVar724._60_4_;
          auVar722 = vfmadd132ps_avx512f(auVar791,(undefined1  [64])_ps512_cephes_log_p1,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar791,(undefined1  [64])afVar417);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar791,(undefined1  [64])afVar418);
          auVar724 = vmulps_avx512f(auVar791,auVar791);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar791,(undefined1  [64])afVar419);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar791,(undefined1  [64])afVar420);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar791,(undefined1  [64])afVar421);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar791,(undefined1  [64])afVar422);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar791,(undefined1  [64])afVar423);
          auVar725 = vmulps_avx512f(auVar724,auVar791);
          auVar722 = vfmadd213ps_avx512f(auVar725,auVar722,auVar791);
          auVar723 = vpsubd_avx512f(auVar723,in_ZMM5);
          auVar723 = vcvtdq2ps_avx512f(auVar723);
          auVar725 = vaddps_avx512f(auVar723,(undefined1  [64])afVar407);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar792._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar725._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar792._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar725._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar792._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar725._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar792._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar725._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar792._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar725._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar792._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar725._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar792._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar725._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar792._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar725._28_4_;
          bVar12 = (bool)(bVar29 & 1);
          auVar792._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar725._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar792._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar725._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar792._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar725._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar792._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar725._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar792._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar725._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar792._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar725._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar792._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar725._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar792._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar725._60_4_;
          uVar47 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar442),2);
          auVar722 = vfmadd231ps_avx512f(auVar722,auVar792,auVar717);
          auVar722 = vfmadd231ps_avx512f(auVar722,auVar718,auVar724);
          auVar722 = vfmadd231ps_avx512f(auVar722,auVar719,auVar792);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar793._0_4_ = (uint)bVar12 * auVar721._0_4_ | (uint)!bVar12 * auVar722._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar793._4_4_ = (uint)bVar12 * auVar721._4_4_ | (uint)!bVar12 * auVar722._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar793._8_4_ = (uint)bVar12 * auVar721._8_4_ | (uint)!bVar12 * auVar722._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar793._12_4_ = (uint)bVar12 * auVar721._12_4_ | (uint)!bVar12 * auVar722._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar793._16_4_ = (uint)bVar12 * auVar721._16_4_ | (uint)!bVar12 * auVar722._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar793._20_4_ = (uint)bVar12 * auVar721._20_4_ | (uint)!bVar12 * auVar722._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar793._24_4_ = (uint)bVar12 * auVar721._24_4_ | (uint)!bVar12 * auVar722._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar793._28_4_ = (uint)bVar12 * auVar721._28_4_ | (uint)!bVar12 * auVar722._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar793._32_4_ = (uint)bVar12 * auVar721._32_4_ | (uint)!bVar12 * auVar722._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar793._36_4_ = (uint)bVar12 * auVar721._36_4_ | (uint)!bVar12 * auVar722._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar793._40_4_ = (uint)bVar12 * auVar721._40_4_ | (uint)!bVar12 * auVar722._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar793._44_4_ = (uint)bVar12 * auVar721._44_4_ | (uint)!bVar12 * auVar722._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar793._48_4_ = (uint)bVar12 * auVar721._48_4_ | (uint)!bVar12 * auVar722._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar793._52_4_ = (uint)bVar12 * auVar721._52_4_ | (uint)!bVar12 * auVar722._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar793._56_4_ = (uint)bVar12 * auVar721._56_4_ | (uint)!bVar12 * auVar722._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar793._60_4_ = (uint)bVar12 * auVar721._60_4_ | (uint)!bVar12 * auVar722._60_4_;
          auVar722 = vmulps_avx512f(auVar793,auVar734);
          auVar722 = vminps_avx512f(auVar722,(undefined1  [64])afVar408);
          auVar722 = vmaxps_avx512f(auVar722,(undefined1  [64])afVar409);
          auVar723 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar722,in_ZMM4);
          auVar724 = vrndscaleps_avx512f(auVar723,1);
          uVar47 = vcmpps_avx512f(auVar723,auVar724,1);
          auVar723 = vsubps_avx512f(auVar724,(undefined1  [64])afVar407);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar794._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar724._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar794._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar724._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar794._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar724._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar794._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar724._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar794._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar724._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar794._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar724._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar794._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar724._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar794._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar724._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar794._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar724._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar794._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar724._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar794._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar724._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar794._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar724._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar794._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar724._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar794._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar724._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar794._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar724._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar794._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar724._60_4_;
          auVar722 = vfmadd231ps_avx512f(auVar722,auVar794,auVar720);
          auVar722 = vfmadd231ps_avx512f(auVar722,auVar794,auVar716);
          auVar723 = vfmadd213ps_avx512f(auVar722,(undefined1  [64])afVar411,
                                         (undefined1  [64])afVar412);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar413);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar414);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar415);
          auVar724 = vmulps_avx512f(auVar722,auVar722);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,in_ZMM4);
          auVar722 = vfmadd213ps_avx512f(auVar723,auVar724,auVar722);
          auVar723 = vcvttps2dq_avx512f(auVar794);
          auVar722 = vaddps_avx512f(auVar722,(undefined1  [64])afVar407);
          auVar723 = vpaddd_avx512f(auVar723,in_ZMM5);
          auVar723 = vpslld_avx512f(auVar723,0x17);
          auVar722 = vmulps_avx512f(auVar722,auVar723);
          *(undefined1 (*) [64])outptr = auVar722;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 0x10;
        } while (iVar424 < (int)uVar427);
        uVar425 = uVar427 & 0x7ffffff0;
        auVar460 = auVar519;
        auVar674 = auVar678;
      }
      auVar442 = auVar674._0_16_;
      if ((int)(uVar425 | 7) < (int)uVar427) {
        fVar890 = *ptr1;
        auVar1320._8_4_ = 0xbf800000;
        auVar1320._0_8_ = 0xbf800000bf800000;
        auVar1320._12_4_ = 0xbf800000;
        auVar1320._16_4_ = 0xbf800000;
        auVar1320._20_4_ = 0xbf800000;
        auVar1320._24_4_ = 0xbf800000;
        auVar1320._28_4_ = 0xbf800000;
        auVar1378._8_4_ = 0x3f800000;
        auVar1378._0_8_ = 0x3f8000003f800000;
        auVar1378._12_4_ = 0x3f800000;
        auVar1378._16_4_ = 0x3f800000;
        auVar1378._20_4_ = 0x3f800000;
        auVar1378._24_4_ = 0x3f800000;
        auVar1378._28_4_ = 0x3f800000;
        auVar1434._8_4_ = 0x3d9021bb;
        auVar1434._0_8_ = 0x3d9021bb3d9021bb;
        auVar1434._12_4_ = 0x3d9021bb;
        auVar1434._16_4_ = 0x3d9021bb;
        auVar1434._20_4_ = 0x3d9021bb;
        auVar1434._24_4_ = 0x3d9021bb;
        auVar1434._28_4_ = 0x3d9021bb;
        auVar1488._8_4_ = 0xbdebd1b8;
        auVar1488._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1488._12_4_ = 0xbdebd1b8;
        auVar1488._16_4_ = 0xbdebd1b8;
        auVar1488._20_4_ = 0xbdebd1b8;
        auVar1488._24_4_ = 0xbdebd1b8;
        auVar1488._28_4_ = 0xbdebd1b8;
        auVar1542._8_4_ = 0x3def251a;
        auVar1542._0_8_ = 0x3def251a3def251a;
        auVar1542._12_4_ = 0x3def251a;
        auVar1542._16_4_ = 0x3def251a;
        auVar1542._20_4_ = 0x3def251a;
        auVar1542._24_4_ = 0x3def251a;
        auVar1542._28_4_ = 0x3def251a;
        auVar1596._8_4_ = 0xbdfe5d4f;
        auVar1596._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1596._12_4_ = 0xbdfe5d4f;
        auVar1596._16_4_ = 0xbdfe5d4f;
        auVar1596._20_4_ = 0xbdfe5d4f;
        auVar1596._24_4_ = 0xbdfe5d4f;
        auVar1596._28_4_ = 0xbdfe5d4f;
        auVar1650._8_4_ = 0x3e11e9bf;
        auVar1650._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1650._12_4_ = 0x3e11e9bf;
        auVar1650._16_4_ = 0x3e11e9bf;
        auVar1650._20_4_ = 0x3e11e9bf;
        auVar1650._24_4_ = 0x3e11e9bf;
        auVar1650._28_4_ = 0x3e11e9bf;
        auVar1704._8_4_ = 0xbe2aae50;
        auVar1704._0_8_ = 0xbe2aae50be2aae50;
        auVar1704._12_4_ = 0xbe2aae50;
        auVar1704._16_4_ = 0xbe2aae50;
        auVar1704._20_4_ = 0xbe2aae50;
        auVar1704._24_4_ = 0xbe2aae50;
        auVar1704._28_4_ = 0xbe2aae50;
        auVar1755._8_4_ = 0x3e4cceac;
        auVar1755._0_8_ = 0x3e4cceac3e4cceac;
        auVar1755._12_4_ = 0x3e4cceac;
        auVar1755._16_4_ = 0x3e4cceac;
        auVar1755._20_4_ = 0x3e4cceac;
        auVar1755._24_4_ = 0x3e4cceac;
        auVar1755._28_4_ = 0x3e4cceac;
        auVar1806._8_4_ = 0xbe7ffffc;
        auVar1806._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1806._12_4_ = 0xbe7ffffc;
        auVar1806._16_4_ = 0xbe7ffffc;
        auVar1806._20_4_ = 0xbe7ffffc;
        auVar1806._24_4_ = 0xbe7ffffc;
        auVar1806._28_4_ = 0xbe7ffffc;
        auVar677 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar678 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar679 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar460 = vxorps_avx512vl(auVar460,auVar460);
        auVar674 = vpcmpeqd_avx2(auVar674,auVar674);
        auVar442 = auVar674._0_16_;
        auVar680 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar683 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar684 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar685 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar701 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar565 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar566 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar567 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar568 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        uVar882 = uVar425;
        do {
          auVar281._8_4_ = 0x800000;
          auVar281._0_8_ = 0x80000000800000;
          auVar281._12_4_ = 0x800000;
          auVar281._16_4_ = 0x800000;
          auVar281._20_4_ = 0x800000;
          auVar281._24_4_ = 0x800000;
          auVar281._28_4_ = 0x800000;
          auVar569 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar281);
          auVar570 = vpsrld_avx512vl(auVar569,0x17);
          auVar1141._8_4_ = 0x807fffff;
          auVar1141._0_8_ = 0x807fffff807fffff;
          auVar1141._12_4_ = 0x807fffff;
          auVar1141._16_4_ = 0x807fffff;
          auVar1141._20_4_ = 0x807fffff;
          auVar1141._24_4_ = 0x807fffff;
          auVar1141._28_4_ = 0x807fffff;
          auVar282._8_4_ = 0x3f000000;
          auVar282._0_8_ = 0x3f0000003f000000;
          auVar282._12_4_ = 0x3f000000;
          auVar282._16_4_ = 0x3f000000;
          auVar282._20_4_ = 0x3f000000;
          auVar282._24_4_ = 0x3f000000;
          auVar282._28_4_ = 0x3f000000;
          auVar569 = vpternlogd_avx512vl(auVar569,auVar1141,auVar282,0xea);
          auVar283._8_4_ = 0x3f3504f3;
          auVar283._0_8_ = 0x3f3504f33f3504f3;
          auVar283._12_4_ = 0x3f3504f3;
          auVar283._16_4_ = 0x3f3504f3;
          auVar283._20_4_ = 0x3f3504f3;
          auVar283._24_4_ = 0x3f3504f3;
          auVar283._28_4_ = 0x3f3504f3;
          uVar47 = vcmpps_avx512vl(auVar569,auVar283,1);
          auVar563 = vaddps_avx512vl(auVar569,auVar1320);
          auVar569 = vaddps_avx512vl(auVar563,auVar569);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar616._0_4_ = (float)((uint)bVar12 * auVar569._0_4_ | (uint)!bVar12 * auVar563._0_4_);
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar616._4_4_ = (float)((uint)bVar12 * auVar569._4_4_ | (uint)!bVar12 * auVar563._4_4_);
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar616._8_4_ = (float)((uint)bVar12 * auVar569._8_4_ | (uint)!bVar12 * auVar563._8_4_);
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar616._12_4_ =
               (float)((uint)bVar12 * auVar569._12_4_ | (uint)!bVar12 * auVar563._12_4_);
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar616._16_4_ =
               (float)((uint)bVar12 * auVar569._16_4_ | (uint)!bVar12 * auVar563._16_4_);
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar616._20_4_ =
               (float)((uint)bVar12 * auVar569._20_4_ | (uint)!bVar12 * auVar563._20_4_);
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar616._24_4_ =
               (float)((uint)bVar12 * auVar569._24_4_ | (uint)!bVar12 * auVar563._24_4_);
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar616._28_4_ = (uint)bVar12 * auVar569._28_4_ | (uint)!bVar12 * auVar563._28_4_;
          auVar569 = vfmadd213ps_avx512vl(auVar1434,auVar616,auVar1488);
          auVar569 = vfmadd213ps_avx512vl(auVar569,auVar616,auVar1542);
          auVar569 = vfmadd213ps_avx512vl(auVar569,auVar616,auVar1596);
          auVar569 = vfmadd213ps_avx512vl(auVar569,auVar616,auVar1650);
          auVar1213._0_4_ = auVar616._0_4_ * auVar616._0_4_;
          auVar1213._4_4_ = auVar616._4_4_ * auVar616._4_4_;
          auVar1213._8_4_ = auVar616._8_4_ * auVar616._8_4_;
          auVar1213._12_4_ = auVar616._12_4_ * auVar616._12_4_;
          auVar1213._16_4_ = auVar616._16_4_ * auVar616._16_4_;
          auVar1213._20_4_ = auVar616._20_4_ * auVar616._20_4_;
          auVar1213._28_36_ = in_ZMM4._28_36_;
          auVar1213._24_4_ = auVar616._24_4_ * auVar616._24_4_;
          auVar569 = vfmadd213ps_avx512vl(auVar569,auVar616,auVar1704);
          auVar569 = vfmadd213ps_avx512vl(auVar569,auVar616,auVar1755);
          auVar569 = vfmadd213ps_avx512vl(auVar569,auVar616,auVar1806);
          auVar569 = vfmadd213ps_avx512vl(auVar569,auVar616,auVar677);
          auVar1277._0_4_ = auVar1213._0_4_ * auVar616._0_4_;
          auVar1277._4_4_ = auVar1213._4_4_ * auVar616._4_4_;
          auVar1277._8_4_ = auVar1213._8_4_ * auVar616._8_4_;
          auVar1277._12_4_ = auVar1213._12_4_ * auVar616._12_4_;
          auVar1277._16_4_ = auVar1213._16_4_ * auVar616._16_4_;
          auVar1277._20_4_ = auVar1213._20_4_ * auVar616._20_4_;
          auVar1277._28_36_ = in_ZMM5._28_36_;
          auVar1277._24_4_ = auVar1213._24_4_ * auVar616._24_4_;
          auVar563 = vmulps_avx512vl(auVar1277._0_32_,auVar569);
          auVar284._8_4_ = 0xffffff82;
          auVar284._0_8_ = 0xffffff82ffffff82;
          auVar284._12_4_ = 0xffffff82;
          auVar284._16_4_ = 0xffffff82;
          auVar284._20_4_ = 0xffffff82;
          auVar284._24_4_ = 0xffffff82;
          auVar284._28_4_ = 0xffffff82;
          auVar569 = vpaddd_avx512vl(auVar570,auVar284);
          auVar569 = vcvtdq2ps_avx(auVar569);
          auVar570 = vsubps_avx512vl(auVar569,auVar1378);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar617._0_4_ = (uint)bVar12 * auVar570._0_4_ | (uint)!bVar12 * auVar569._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar617._4_4_ = (uint)bVar12 * auVar570._4_4_ | (uint)!bVar12 * auVar569._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar617._8_4_ = (uint)bVar12 * auVar570._8_4_ | (uint)!bVar12 * auVar569._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar617._12_4_ = (uint)bVar12 * auVar570._12_4_ | (uint)!bVar12 * auVar569._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar617._16_4_ = (uint)bVar12 * auVar570._16_4_ | (uint)!bVar12 * auVar569._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar617._20_4_ = (uint)bVar12 * auVar570._20_4_ | (uint)!bVar12 * auVar569._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar617._24_4_ = (uint)bVar12 * auVar570._24_4_ | (uint)!bVar12 * auVar569._24_4_;
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar617._28_4_ = (uint)bVar12 * auVar570._28_4_ | (uint)!bVar12 * auVar569._28_4_;
          auVar569 = vfmadd231ps_avx512vl(auVar563,auVar617,auVar678);
          auVar570 = vfmsub231ps_avx512vl(auVar569,auVar562,auVar1213._0_32_);
          uVar47 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                                   ZEXT1632(auVar460),2);
          auVar569 = vsubps_avx(auVar570,auVar616);
          auVar569 = vfmsub231ps_avx512vl(auVar569,auVar679,auVar617);
          bVar12 = (bool)((byte)uVar47 & 1);
          bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar47 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar47 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar376._4_4_ =
               (float)((uint)bVar13 * auVar674._4_4_ | (uint)!bVar13 * auVar569._4_4_) * fVar890;
          auVar376._0_4_ =
               (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar569._0_4_) * fVar890;
          auVar376._8_4_ =
               (float)((uint)bVar14 * auVar674._8_4_ | (uint)!bVar14 * auVar569._8_4_) * fVar890;
          auVar376._12_4_ =
               (float)((uint)bVar15 * auVar674._12_4_ | (uint)!bVar15 * auVar569._12_4_) * fVar890;
          auVar376._16_4_ =
               (float)((uint)bVar16 * auVar674._16_4_ | (uint)!bVar16 * auVar569._16_4_) * fVar890;
          auVar376._20_4_ =
               (float)((uint)bVar17 * auVar674._20_4_ | (uint)!bVar17 * auVar569._20_4_) * fVar890;
          auVar376._24_4_ =
               (float)((uint)bVar18 * auVar674._24_4_ | (uint)!bVar18 * auVar569._24_4_) * fVar890;
          auVar376._28_4_ = auVar617._28_4_;
          auVar569 = vminps_avx512vl(auVar376,auVar680);
          auVar563 = vmaxps_avx512vl(auVar569,auVar683);
          auVar556 = vfmadd231ps_avx512vl(auVar562,auVar563,auVar684);
          auVar569 = vroundps_avx(auVar556,1);
          uVar47 = vcmpps_avx512vl(auVar556,auVar569,1);
          auVar556 = vsubps_avx512vl(auVar569,auVar1378);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar618._0_4_ = (float)((uint)bVar12 * auVar556._0_4_ | (uint)!bVar12 * auVar569._0_4_);
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar618._4_4_ = (float)((uint)bVar12 * auVar556._4_4_ | (uint)!bVar12 * auVar569._4_4_);
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar618._8_4_ = (float)((uint)bVar12 * auVar556._8_4_ | (uint)!bVar12 * auVar569._8_4_);
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar618._12_4_ =
               (float)((uint)bVar12 * auVar556._12_4_ | (uint)!bVar12 * auVar569._12_4_);
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar618._16_4_ =
               (float)((uint)bVar12 * auVar556._16_4_ | (uint)!bVar12 * auVar569._16_4_);
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar618._20_4_ =
               (float)((uint)bVar12 * auVar556._20_4_ | (uint)!bVar12 * auVar569._20_4_);
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar618._24_4_ =
               (float)((uint)bVar12 * auVar556._24_4_ | (uint)!bVar12 * auVar569._24_4_);
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar618._28_4_ =
               (float)((uint)bVar12 * auVar556._28_4_ | (uint)!bVar12 * auVar569._28_4_);
          in_ZMM4 = ZEXT3264(auVar618);
          auVar569 = vfmsub231ps_avx512vl(auVar563,auVar618,auVar679);
          auVar569 = vfnmsub231ps_avx512vl(auVar569,auVar618,auVar678);
          auVar563 = vfmadd213ps_avx512vl(auVar685,auVar569,auVar701);
          auVar377._4_4_ = auVar569._4_4_ * auVar569._4_4_;
          auVar377._0_4_ = auVar569._0_4_ * auVar569._0_4_;
          auVar377._8_4_ = auVar569._8_4_ * auVar569._8_4_;
          auVar377._12_4_ = auVar569._12_4_ * auVar569._12_4_;
          auVar377._16_4_ = auVar569._16_4_ * auVar569._16_4_;
          auVar377._20_4_ = auVar569._20_4_ * auVar569._20_4_;
          auVar377._24_4_ = auVar569._24_4_ * auVar569._24_4_;
          auVar377._28_4_ = auVar570._28_4_;
          in_ZMM5 = ZEXT3264(auVar377);
          auVar570 = vfmadd213ps_avx512vl(auVar563,auVar569,auVar565);
          auVar570 = vfmadd213ps_avx512vl(auVar570,auVar569,auVar566);
          auVar570 = vfmadd213ps_avx512vl(auVar570,auVar569,auVar567);
          auVar570 = vfmadd213ps_avx512vl(auVar570,auVar569,auVar562);
          auVar461 = vfmadd213ps_fma(auVar570,auVar377,auVar569);
          auVar1062._0_4_ = (int)auVar618._0_4_;
          auVar1062._4_4_ = (int)auVar618._4_4_;
          auVar1062._8_4_ = (int)auVar618._8_4_;
          auVar1062._12_4_ = (int)auVar618._12_4_;
          auVar1062._16_4_ = (int)auVar618._16_4_;
          auVar1062._20_4_ = (int)auVar618._20_4_;
          auVar1062._24_4_ = (int)auVar618._24_4_;
          auVar1062._28_4_ = (int)auVar618._28_4_;
          auVar569 = vpslld_avx2(auVar1062,0x17);
          auVar569 = vpaddd_avx512vl(auVar569,auVar568);
          auVar461 = vfmadd213ps_fma(auVar569,ZEXT1632(auVar461),auVar569);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar461);
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar425 = uVar882 + 8;
          iVar424 = uVar882 + 0xf;
          uVar882 = uVar425;
        } while (iVar424 < (int)uVar427);
      }
      if ((int)uVar427 <= (int)(uVar425 | 3)) {
        return;
      }
      fVar890 = *ptr1;
      lVar428 = 0;
      auVar1230._8_4_ = 0x3f3504f3;
      auVar1230._0_8_ = 0x3f3504f33f3504f3;
      auVar1230._12_4_ = 0x3f3504f3;
      auVar1295._8_4_ = 0xbf800000;
      auVar1295._0_8_ = 0xbf800000bf800000;
      auVar1295._12_4_ = 0xbf800000;
      auVar1356._8_4_ = 0x3f800000;
      auVar1356._0_8_ = 0x3f8000003f800000;
      auVar1356._12_4_ = 0x3f800000;
      auVar1125._8_4_ = 0x3d9021bb;
      auVar1125._0_8_ = 0x3d9021bb3d9021bb;
      auVar1125._12_4_ = 0x3d9021bb;
      auVar1466._8_4_ = 0xbdebd1b8;
      auVar1466._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1466._12_4_ = 0xbdebd1b8;
      auVar1520._8_4_ = 0x3def251a;
      auVar1520._0_8_ = 0x3def251a3def251a;
      auVar1520._12_4_ = 0x3def251a;
      auVar1574._8_4_ = 0xbdfe5d4f;
      auVar1574._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1574._12_4_ = 0xbdfe5d4f;
      auVar1628._8_4_ = 0x3e11e9bf;
      auVar1628._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1628._12_4_ = 0x3e11e9bf;
      auVar1682._8_4_ = 0xbe2aae50;
      auVar1682._0_8_ = 0xbe2aae50be2aae50;
      auVar1682._12_4_ = 0xbe2aae50;
      auVar1736._8_4_ = 0x3e4cceac;
      auVar1736._0_8_ = 0x3e4cceac3e4cceac;
      auVar1736._12_4_ = 0x3e4cceac;
      auVar1787._8_4_ = 0xbe7ffffc;
      auVar1787._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar1787._12_4_ = 0xbe7ffffc;
      auVar461 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar519 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar472 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar464 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar460 = vxorps_avx512vl(auVar460,auVar460);
      auVar442 = vpcmpeqd_avx(auVar442,auVar442);
      auVar465 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar466 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar469 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar470 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar523 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar443 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar445 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar446 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      do {
        uVar47 = vcmpps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar428 * 4),
                                 auVar460,2);
        auVar140._8_4_ = 0x800000;
        auVar140._0_8_ = 0x80000000800000;
        auVar140._12_4_ = 0x800000;
        auVar447 = vmaxps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar428 * 4),
                                   auVar140);
        auVar439 = vpsrld_avx512vl(auVar447,0x17);
        auVar1043._8_4_ = 0x807fffff;
        auVar1043._0_8_ = 0x807fffff807fffff;
        auVar1043._12_4_ = 0x807fffff;
        auVar141._8_4_ = 0x3f000000;
        auVar141._0_8_ = 0x3f0000003f000000;
        auVar141._12_4_ = 0x3f000000;
        auVar447 = vpternlogd_avx512vl(auVar447,auVar1043,auVar141,0xea);
        uVar430 = vcmpps_avx512vl(auVar447,auVar1230,1);
        auVar440 = vaddps_avx512vl(auVar447,auVar1295);
        auVar447 = vaddps_avx512vl(auVar440,auVar447);
        bVar12 = (bool)((byte)uVar430 & 1);
        auVar505._0_4_ = (uint)bVar12 * auVar447._0_4_ | (uint)!bVar12 * auVar440._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar505._4_4_ = (uint)bVar12 * auVar447._4_4_ | (uint)!bVar12 * auVar440._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar505._8_4_ = (uint)bVar12 * auVar447._8_4_ | (uint)!bVar12 * auVar440._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar505._12_4_ = (uint)bVar12 * auVar447._12_4_ | (uint)!bVar12 * auVar440._12_4_;
        auVar440 = vmulps_avx512vl(auVar505,auVar505);
        auVar447 = vfmadd213ps_fma(auVar1125,auVar505,auVar1466);
        auVar447 = vfmadd213ps_fma(auVar447,auVar505,auVar1520);
        auVar447 = vfmadd213ps_fma(auVar447,auVar505,auVar1574);
        auVar447 = vfmadd213ps_fma(auVar447,auVar505,auVar1628);
        auVar447 = vfmadd213ps_fma(auVar447,auVar505,auVar1682);
        auVar447 = vfmadd213ps_fma(auVar447,auVar505,auVar1736);
        auVar447 = vfmadd213ps_fma(auVar447,auVar505,auVar1787);
        auVar447 = vfmadd213ps_avx512vl(auVar447,auVar505,auVar461);
        auVar434 = vmulps_avx512vl(auVar440,auVar505);
        auVar1177._0_4_ = auVar447._0_4_ * auVar434._0_4_;
        auVar1177._4_4_ = auVar447._4_4_ * auVar434._4_4_;
        auVar1177._8_4_ = auVar447._8_4_ * auVar434._8_4_;
        auVar1177._12_4_ = auVar447._12_4_ * auVar434._12_4_;
        auVar142._8_4_ = 0xffffff82;
        auVar142._0_8_ = 0xffffff82ffffff82;
        auVar142._12_4_ = 0xffffff82;
        auVar447 = vpaddd_avx512vl(auVar439,auVar142);
        auVar447 = vcvtdq2ps_avx(auVar447);
        auVar439 = vsubps_avx512vl(auVar447,auVar1356);
        bVar12 = (bool)((byte)uVar430 & 1);
        auVar506._0_4_ = (uint)bVar12 * auVar439._0_4_ | (uint)!bVar12 * auVar447._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar506._4_4_ = (uint)bVar12 * auVar439._4_4_ | (uint)!bVar12 * auVar447._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar506._8_4_ = (uint)bVar12 * auVar439._8_4_ | (uint)!bVar12 * auVar447._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar506._12_4_ = (uint)bVar12 * auVar439._12_4_ | (uint)!bVar12 * auVar447._12_4_;
        auVar447 = vfmadd231ps_avx512vl(auVar1177,auVar506,auVar519);
        auVar447 = vfmsub231ps_avx512vl(auVar447,auVar472,auVar440);
        auVar447 = vsubps_avx(auVar447,auVar505);
        auVar447 = vfmsub231ps_avx512vl(auVar447,auVar464,auVar506);
        bVar12 = (bool)((byte)uVar47 & 1);
        bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar1044._0_4_ =
             (float)((uint)bVar12 * auVar442._0_4_ | (uint)!bVar12 * auVar447._0_4_) * fVar890;
        auVar1044._4_4_ =
             (float)((uint)bVar13 * auVar442._4_4_ | (uint)!bVar13 * auVar447._4_4_) * fVar890;
        auVar1044._8_4_ =
             (float)((uint)bVar14 * auVar442._8_4_ | (uint)!bVar14 * auVar447._8_4_) * fVar890;
        auVar1044._12_4_ =
             (float)((uint)bVar15 * auVar442._12_4_ | (uint)!bVar15 * auVar447._12_4_) * fVar890;
        auVar447 = vminps_avx512vl(auVar1044,auVar465);
        auVar439 = vmaxps_avx512vl(auVar447,auVar466);
        auVar440 = vfmadd231ps_avx512vl(auVar472,auVar439,auVar469);
        auVar1412._0_4_ = (int)auVar440._0_4_;
        auVar1412._4_4_ = (int)auVar440._4_4_;
        auVar1412._8_4_ = (int)auVar440._8_4_;
        auVar1412._12_4_ = (int)auVar440._12_4_;
        auVar447 = vcvtdq2ps_avx(auVar1412);
        uVar47 = vcmpps_avx512vl(auVar440,auVar447,1);
        auVar440 = vsubps_avx512vl(auVar447,auVar1356);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar507._0_4_ = (float)((uint)bVar12 * auVar440._0_4_ | (uint)!bVar12 * auVar447._0_4_);
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar507._4_4_ = (float)((uint)bVar12 * auVar440._4_4_ | (uint)!bVar12 * auVar447._4_4_);
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar507._8_4_ = (float)((uint)bVar12 * auVar440._8_4_ | (uint)!bVar12 * auVar447._8_4_);
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar507._12_4_ = (float)((uint)bVar12 * auVar440._12_4_ | (uint)!bVar12 * auVar447._12_4_);
        auVar447 = vfmsub231ps_avx512vl(auVar439,auVar507,auVar464);
        auVar447 = vfnmsub231ps_avx512vl(auVar447,auVar507,auVar519);
        auVar1178._0_4_ = auVar447._0_4_ * auVar447._0_4_;
        auVar1178._4_4_ = auVar447._4_4_ * auVar447._4_4_;
        auVar1178._8_4_ = auVar447._8_4_ * auVar447._8_4_;
        auVar1178._12_4_ = auVar447._12_4_ * auVar447._12_4_;
        auVar439 = vfmadd213ps_avx512vl(auVar470,auVar447,auVar523);
        auVar439 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar443);
        auVar439 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar444);
        auVar439 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar445);
        auVar439 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar472);
        auVar447 = vfmadd213ps_avx512vl(auVar439,auVar1178,auVar447);
        auVar1045._0_4_ = (int)auVar507._0_4_;
        auVar1045._4_4_ = (int)auVar507._4_4_;
        auVar1045._8_4_ = (int)auVar507._8_4_;
        auVar1045._12_4_ = (int)auVar507._12_4_;
        auVar439 = vpslld_avx(auVar1045,0x17);
        auVar439 = vpaddd_avx512vl(auVar439,auVar446);
        auVar447 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar439);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar447;
        lVar428 = lVar428 + 4;
      } while ((int)(uVar425 + 3 + (int)lVar428) < (int)uVar427);
      return;
    }
    if (aw != 1) {
      return;
    }
    if (iVar424 == 0x10) {
      uVar47 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1264(ZEXT812(0)),2);
      auVar734 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,(undefined1  [64])_ps512_min_norm_pos);
      auVar716 = vpsrld_avx512f(auVar734,0x17);
      auVar717 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
      auVar734 = vpternlogd_avx512f(auVar734,auVar717,(undefined1  [64])_ps512_inv_mant_mask,0xec);
      auVar718 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar716 = vpsubd_avx512f(auVar716,auVar718);
      auVar716 = vcvtdq2ps_avx512f(auVar716);
      uVar430 = vcmpps_avx512f(auVar734,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      auVar719 = vsubps_avx512f(auVar734,(undefined1  [64])::_ps512_1);
      auVar720 = vaddps_avx512f(auVar716,(undefined1  [64])::_ps512_1);
      bVar12 = (bool)((byte)uVar430 & 1);
      auVar828._0_4_ = (uint)bVar12 * auVar716._0_4_ | (uint)!bVar12 * auVar720._0_4_;
      bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
      auVar828._4_4_ = (uint)bVar12 * auVar716._4_4_ | (uint)!bVar12 * auVar720._4_4_;
      bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
      auVar828._8_4_ = (uint)bVar12 * auVar716._8_4_ | (uint)!bVar12 * auVar720._8_4_;
      bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
      auVar828._12_4_ = (uint)bVar12 * auVar716._12_4_ | (uint)!bVar12 * auVar720._12_4_;
      bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
      auVar828._16_4_ = (uint)bVar12 * auVar716._16_4_ | (uint)!bVar12 * auVar720._16_4_;
      bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
      auVar828._20_4_ = (uint)bVar12 * auVar716._20_4_ | (uint)!bVar12 * auVar720._20_4_;
      bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
      auVar828._24_4_ = (uint)bVar12 * auVar716._24_4_ | (uint)!bVar12 * auVar720._24_4_;
      bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
      auVar828._28_4_ = (uint)bVar12 * auVar716._28_4_ | (uint)!bVar12 * auVar720._28_4_;
      bVar29 = (byte)(uVar430 >> 8);
      bVar12 = (bool)(bVar29 & 1);
      auVar828._32_4_ = (uint)bVar12 * auVar716._32_4_ | (uint)!bVar12 * auVar720._32_4_;
      bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
      auVar828._36_4_ = (uint)bVar12 * auVar716._36_4_ | (uint)!bVar12 * auVar720._36_4_;
      bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
      auVar828._40_4_ = (uint)bVar12 * auVar716._40_4_ | (uint)!bVar12 * auVar720._40_4_;
      bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
      auVar828._44_4_ = (uint)bVar12 * auVar716._44_4_ | (uint)!bVar12 * auVar720._44_4_;
      bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
      auVar828._48_4_ = (uint)bVar12 * auVar716._48_4_ | (uint)!bVar12 * auVar720._48_4_;
      bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
      auVar828._52_4_ = (uint)bVar12 * auVar716._52_4_ | (uint)!bVar12 * auVar720._52_4_;
      bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
      auVar828._56_4_ = (uint)bVar12 * auVar716._56_4_ | (uint)!bVar12 * auVar720._56_4_;
      bVar12 = SUB81(uVar430 >> 0xf,0);
      auVar828._60_4_ = (uint)bVar12 * auVar716._60_4_ | (uint)!bVar12 * auVar720._60_4_;
      auVar734 = vaddps_avx512f(auVar719,auVar734);
      bVar12 = (bool)((byte)uVar430 & 1);
      auVar829._0_4_ = (uint)bVar12 * auVar734._0_4_ | (uint)!bVar12 * auVar719._0_4_;
      bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
      auVar829._4_4_ = (uint)bVar12 * auVar734._4_4_ | (uint)!bVar12 * auVar719._4_4_;
      bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
      auVar829._8_4_ = (uint)bVar12 * auVar734._8_4_ | (uint)!bVar12 * auVar719._8_4_;
      bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
      auVar829._12_4_ = (uint)bVar12 * auVar734._12_4_ | (uint)!bVar12 * auVar719._12_4_;
      bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
      auVar829._16_4_ = (uint)bVar12 * auVar734._16_4_ | (uint)!bVar12 * auVar719._16_4_;
      bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
      auVar829._20_4_ = (uint)bVar12 * auVar734._20_4_ | (uint)!bVar12 * auVar719._20_4_;
      bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
      auVar829._24_4_ = (uint)bVar12 * auVar734._24_4_ | (uint)!bVar12 * auVar719._24_4_;
      bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
      auVar829._28_4_ = (uint)bVar12 * auVar734._28_4_ | (uint)!bVar12 * auVar719._28_4_;
      bVar12 = (bool)(bVar29 & 1);
      auVar829._32_4_ = (uint)bVar12 * auVar734._32_4_ | (uint)!bVar12 * auVar719._32_4_;
      bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
      auVar829._36_4_ = (uint)bVar12 * auVar734._36_4_ | (uint)!bVar12 * auVar719._36_4_;
      bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
      auVar829._40_4_ = (uint)bVar12 * auVar734._40_4_ | (uint)!bVar12 * auVar719._40_4_;
      bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
      auVar829._44_4_ = (uint)bVar12 * auVar734._44_4_ | (uint)!bVar12 * auVar719._44_4_;
      bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
      auVar829._48_4_ = (uint)bVar12 * auVar734._48_4_ | (uint)!bVar12 * auVar719._48_4_;
      bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
      auVar829._52_4_ = (uint)bVar12 * auVar734._52_4_ | (uint)!bVar12 * auVar719._52_4_;
      bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
      auVar829._56_4_ = (uint)bVar12 * auVar734._56_4_ | (uint)!bVar12 * auVar719._56_4_;
      bVar12 = SUB81(uVar430 >> 0xf,0);
      auVar829._60_4_ = (uint)bVar12 * auVar734._60_4_ | (uint)!bVar12 * auVar719._60_4_;
      auVar734 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_log_p0,auVar829,
                                     (undefined1  [64])_ps512_cephes_log_p1);
      auVar734 = vfmadd213ps_avx512f(auVar734,auVar829,(undefined1  [64])_ps512_cephes_log_p2);
      auVar734 = vfmadd213ps_avx512f(auVar734,auVar829,(undefined1  [64])_ps512_cephes_log_p3);
      auVar734 = vfmadd213ps_avx512f(auVar734,auVar829,(undefined1  [64])_ps512_cephes_log_p4);
      auVar734 = vfmadd213ps_avx512f(auVar734,auVar829,(undefined1  [64])_ps512_cephes_log_p5);
      auVar734 = vfmadd213ps_avx512f(auVar734,auVar829,(undefined1  [64])_ps512_cephes_log_p6);
      auVar734 = vfmadd213ps_avx512f(auVar734,auVar829,(undefined1  [64])_ps512_cephes_log_p7);
      auVar734 = vfmadd213ps_avx512f(auVar734,auVar829,(undefined1  [64])_ps512_cephes_log_p8);
      auVar716 = vmulps_avx512f(auVar829,auVar829);
      auVar719 = vmulps_avx512f(auVar716,auVar829);
      auVar734 = vmulps_avx512f(auVar719,auVar734);
      auVar734 = vfmadd231ps_avx512f(auVar734,auVar828,(undefined1  [64])_ps512_cephes_log_q1);
      auVar734 = vfmsub231ps_avx512f(auVar734,auVar717,auVar716);
      auVar734 = vsubps_avx512f(auVar734,auVar829);
      auVar734 = vfmsub231ps_avx512f(auVar734,(undefined1  [64])_ps512_cephes_log_q2,auVar828);
      auVar716 = vpternlogd_avx512f(auVar716,auVar716,auVar716,0xff);
      bVar12 = (bool)((byte)uVar47 & 1);
      auVar830._0_4_ = (uint)bVar12 * auVar716._0_4_ | (uint)!bVar12 * auVar734._0_4_;
      bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
      auVar830._4_4_ = (uint)bVar12 * auVar716._4_4_ | (uint)!bVar12 * auVar734._4_4_;
      bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
      auVar830._8_4_ = (uint)bVar12 * auVar716._8_4_ | (uint)!bVar12 * auVar734._8_4_;
      bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar830._12_4_ = (uint)bVar12 * auVar716._12_4_ | (uint)!bVar12 * auVar734._12_4_;
      bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
      auVar830._16_4_ = (uint)bVar12 * auVar716._16_4_ | (uint)!bVar12 * auVar734._16_4_;
      bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
      auVar830._20_4_ = (uint)bVar12 * auVar716._20_4_ | (uint)!bVar12 * auVar734._20_4_;
      bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
      auVar830._24_4_ = (uint)bVar12 * auVar716._24_4_ | (uint)!bVar12 * auVar734._24_4_;
      bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
      auVar830._28_4_ = (uint)bVar12 * auVar716._28_4_ | (uint)!bVar12 * auVar734._28_4_;
      bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
      auVar830._32_4_ = (uint)bVar12 * auVar716._32_4_ | (uint)!bVar12 * auVar734._32_4_;
      bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
      auVar830._36_4_ = (uint)bVar12 * auVar716._36_4_ | (uint)!bVar12 * auVar734._36_4_;
      bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
      auVar830._40_4_ = (uint)bVar12 * auVar716._40_4_ | (uint)!bVar12 * auVar734._40_4_;
      bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
      auVar830._44_4_ = (uint)bVar12 * auVar716._44_4_ | (uint)!bVar12 * auVar734._44_4_;
      bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
      auVar830._48_4_ = (uint)bVar12 * auVar716._48_4_ | (uint)!bVar12 * auVar734._48_4_;
      bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
      auVar830._52_4_ = (uint)bVar12 * auVar716._52_4_ | (uint)!bVar12 * auVar734._52_4_;
      bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
      auVar830._56_4_ = (uint)bVar12 * auVar716._56_4_ | (uint)!bVar12 * auVar734._56_4_;
      bVar12 = SUB81(uVar47 >> 0xf,0);
      auVar830._60_4_ = (uint)bVar12 * auVar716._60_4_ | (uint)!bVar12 * auVar734._60_4_;
      auVar734 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar716 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar734);
      auVar734 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar734);
      uVar427 = uVar425;
      do {
        fVar890 = *ptr1;
        auVar360._4_4_ = fVar890;
        auVar360._0_4_ = fVar890;
        auVar360._8_4_ = fVar890;
        auVar360._12_4_ = fVar890;
        auVar360._16_4_ = fVar890;
        auVar360._20_4_ = fVar890;
        auVar360._24_4_ = fVar890;
        auVar360._28_4_ = fVar890;
        auVar360._32_4_ = fVar890;
        auVar360._36_4_ = fVar890;
        auVar360._40_4_ = fVar890;
        auVar360._44_4_ = fVar890;
        auVar360._48_4_ = fVar890;
        auVar360._52_4_ = fVar890;
        auVar360._56_4_ = fVar890;
        auVar360._60_4_ = fVar890;
        auVar719 = vmulps_avx512f(auVar830,auVar360);
        auVar719 = vminps_avx512f(auVar719,(undefined1  [64])afVar408);
        auVar719 = vmaxps_avx512f(auVar719,(undefined1  [64])afVar409);
        auVar720 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar719,auVar717);
        auVar721 = vrndscaleps_avx512f(auVar720,1);
        uVar47 = vcmpps_avx512f(auVar720,auVar721,1);
        auVar720 = vsubps_avx512f(auVar721,(undefined1  [64])afVar407);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar831._0_4_ = (uint)bVar12 * auVar720._0_4_ | (uint)!bVar12 * auVar721._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar831._4_4_ = (uint)bVar12 * auVar720._4_4_ | (uint)!bVar12 * auVar721._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar831._8_4_ = (uint)bVar12 * auVar720._8_4_ | (uint)!bVar12 * auVar721._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar831._12_4_ = (uint)bVar12 * auVar720._12_4_ | (uint)!bVar12 * auVar721._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar831._16_4_ = (uint)bVar12 * auVar720._16_4_ | (uint)!bVar12 * auVar721._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar831._20_4_ = (uint)bVar12 * auVar720._20_4_ | (uint)!bVar12 * auVar721._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar831._24_4_ = (uint)bVar12 * auVar720._24_4_ | (uint)!bVar12 * auVar721._24_4_;
        bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
        auVar831._28_4_ = (uint)bVar12 * auVar720._28_4_ | (uint)!bVar12 * auVar721._28_4_;
        bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
        auVar831._32_4_ = (uint)bVar12 * auVar720._32_4_ | (uint)!bVar12 * auVar721._32_4_;
        bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
        auVar831._36_4_ = (uint)bVar12 * auVar720._36_4_ | (uint)!bVar12 * auVar721._36_4_;
        bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
        auVar831._40_4_ = (uint)bVar12 * auVar720._40_4_ | (uint)!bVar12 * auVar721._40_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
        auVar831._44_4_ = (uint)bVar12 * auVar720._44_4_ | (uint)!bVar12 * auVar721._44_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
        auVar831._48_4_ = (uint)bVar12 * auVar720._48_4_ | (uint)!bVar12 * auVar721._48_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
        auVar831._52_4_ = (uint)bVar12 * auVar720._52_4_ | (uint)!bVar12 * auVar721._52_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
        auVar831._56_4_ = (uint)bVar12 * auVar720._56_4_ | (uint)!bVar12 * auVar721._56_4_;
        bVar12 = SUB81(uVar47 >> 0xf,0);
        auVar831._60_4_ = (uint)bVar12 * auVar720._60_4_ | (uint)!bVar12 * auVar721._60_4_;
        auVar719 = vfmadd231ps_avx512f(auVar719,auVar831,auVar716);
        auVar719 = vfmadd231ps_avx512f(auVar719,auVar831,auVar734);
        auVar720 = vfmadd213ps_avx512f(auVar719,(undefined1  [64])afVar411,
                                       (undefined1  [64])afVar412);
        auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar413);
        auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar414);
        auVar721 = vmulps_avx512f(auVar719,auVar719);
        auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar415);
        auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,auVar717);
        auVar719 = vfmadd213ps_avx512f(auVar720,auVar721,auVar719);
        auVar719 = vaddps_avx512f(auVar719,(undefined1  [64])afVar407);
        auVar720 = vcvttps2dq_avx512f(auVar831);
        auVar720 = vpaddd_avx512f(auVar720,auVar718);
        auVar720 = vpslld_avx512f(auVar720,0x17);
        auVar719 = vmulps_avx512f(auVar719,auVar720);
        *(undefined1 (*) [64])outptr = auVar719;
        ptr1 = ptr1 + 1;
        outptr = (float *)((long)outptr + 0x40);
        uVar427 = uVar427 - 1;
      } while (uVar427 != 0);
    }
    afVar415 = ::_ps512_cephes_exp_p4;
    afVar414 = ::_ps512_cephes_exp_p3;
    afVar413 = ::_ps512_cephes_exp_p2;
    afVar412 = ::_ps512_cephes_exp_p1;
    afVar411 = ::_ps512_cephes_exp_p0;
    afVar410 = ::_ps512_cephes_LOG2EF;
    afVar409 = ::_ps512_exp_lo;
    afVar408 = ::_ps512_exp_hi;
    afVar407 = ::_ps512_1;
    if (iVar424 == 8) {
      auVar674 = *(undefined1 (*) [32])ptr;
      uVar427 = 0;
      if (1 < (int)uVar425) {
        auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar674),auVar674,1);
        uVar47 = vcmpps_avx512f(auVar734,ZEXT1664(ZEXT816(0) << 0x40),2);
        auVar734 = vmaxps_avx512f(auVar734,(undefined1  [64])_ps512_min_norm_pos);
        auVar716 = vpsrld_avx512f(auVar734,0x17);
        auVar717 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar734 = vpternlogd_avx512f(auVar734,auVar717,(undefined1  [64])_ps512_inv_mant_mask,0xec)
        ;
        auVar718 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar716 = vpsubd_avx512f(auVar716,auVar718);
        auVar716 = vcvtdq2ps_avx512f(auVar716);
        uVar430 = vcmpps_avx512f(auVar734,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar719 = vsubps_avx512f(auVar734,(undefined1  [64])::_ps512_1);
        auVar720 = vaddps_avx512f(auVar716,(undefined1  [64])::_ps512_1);
        bVar12 = (bool)((byte)uVar430 & 1);
        auVar832._0_4_ = (uint)bVar12 * auVar716._0_4_ | (uint)!bVar12 * auVar720._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar832._4_4_ = (uint)bVar12 * auVar716._4_4_ | (uint)!bVar12 * auVar720._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar832._8_4_ = (uint)bVar12 * auVar716._8_4_ | (uint)!bVar12 * auVar720._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar832._12_4_ = (uint)bVar12 * auVar716._12_4_ | (uint)!bVar12 * auVar720._12_4_;
        bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
        auVar832._16_4_ = (uint)bVar12 * auVar716._16_4_ | (uint)!bVar12 * auVar720._16_4_;
        bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
        auVar832._20_4_ = (uint)bVar12 * auVar716._20_4_ | (uint)!bVar12 * auVar720._20_4_;
        bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
        auVar832._24_4_ = (uint)bVar12 * auVar716._24_4_ | (uint)!bVar12 * auVar720._24_4_;
        bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
        auVar832._28_4_ = (uint)bVar12 * auVar716._28_4_ | (uint)!bVar12 * auVar720._28_4_;
        bVar29 = (byte)(uVar430 >> 8);
        bVar12 = (bool)(bVar29 & 1);
        auVar832._32_4_ = (uint)bVar12 * auVar716._32_4_ | (uint)!bVar12 * auVar720._32_4_;
        bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
        auVar832._36_4_ = (uint)bVar12 * auVar716._36_4_ | (uint)!bVar12 * auVar720._36_4_;
        bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
        auVar832._40_4_ = (uint)bVar12 * auVar716._40_4_ | (uint)!bVar12 * auVar720._40_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
        auVar832._44_4_ = (uint)bVar12 * auVar716._44_4_ | (uint)!bVar12 * auVar720._44_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
        auVar832._48_4_ = (uint)bVar12 * auVar716._48_4_ | (uint)!bVar12 * auVar720._48_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
        auVar832._52_4_ = (uint)bVar12 * auVar716._52_4_ | (uint)!bVar12 * auVar720._52_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
        auVar832._56_4_ = (uint)bVar12 * auVar716._56_4_ | (uint)!bVar12 * auVar720._56_4_;
        bVar12 = SUB81(uVar430 >> 0xf,0);
        auVar832._60_4_ = (uint)bVar12 * auVar716._60_4_ | (uint)!bVar12 * auVar720._60_4_;
        auVar734 = vaddps_avx512f(auVar719,auVar734);
        bVar12 = (bool)((byte)uVar430 & 1);
        auVar833._0_4_ = (uint)bVar12 * auVar734._0_4_ | (uint)!bVar12 * auVar719._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar833._4_4_ = (uint)bVar12 * auVar734._4_4_ | (uint)!bVar12 * auVar719._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar833._8_4_ = (uint)bVar12 * auVar734._8_4_ | (uint)!bVar12 * auVar719._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar833._12_4_ = (uint)bVar12 * auVar734._12_4_ | (uint)!bVar12 * auVar719._12_4_;
        bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
        auVar833._16_4_ = (uint)bVar12 * auVar734._16_4_ | (uint)!bVar12 * auVar719._16_4_;
        bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
        auVar833._20_4_ = (uint)bVar12 * auVar734._20_4_ | (uint)!bVar12 * auVar719._20_4_;
        bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
        auVar833._24_4_ = (uint)bVar12 * auVar734._24_4_ | (uint)!bVar12 * auVar719._24_4_;
        bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
        auVar833._28_4_ = (uint)bVar12 * auVar734._28_4_ | (uint)!bVar12 * auVar719._28_4_;
        bVar12 = (bool)(bVar29 & 1);
        auVar833._32_4_ = (uint)bVar12 * auVar734._32_4_ | (uint)!bVar12 * auVar719._32_4_;
        bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
        auVar833._36_4_ = (uint)bVar12 * auVar734._36_4_ | (uint)!bVar12 * auVar719._36_4_;
        bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
        auVar833._40_4_ = (uint)bVar12 * auVar734._40_4_ | (uint)!bVar12 * auVar719._40_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
        auVar833._44_4_ = (uint)bVar12 * auVar734._44_4_ | (uint)!bVar12 * auVar719._44_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
        auVar833._48_4_ = (uint)bVar12 * auVar734._48_4_ | (uint)!bVar12 * auVar719._48_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
        auVar833._52_4_ = (uint)bVar12 * auVar734._52_4_ | (uint)!bVar12 * auVar719._52_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
        auVar833._56_4_ = (uint)bVar12 * auVar734._56_4_ | (uint)!bVar12 * auVar719._56_4_;
        bVar12 = SUB81(uVar430 >> 0xf,0);
        auVar833._60_4_ = (uint)bVar12 * auVar734._60_4_ | (uint)!bVar12 * auVar719._60_4_;
        auVar734 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_log_p0,auVar833,
                                       (undefined1  [64])_ps512_cephes_log_p1);
        auVar734 = vfmadd213ps_avx512f(auVar734,auVar833,(undefined1  [64])_ps512_cephes_log_p2);
        auVar734 = vfmadd213ps_avx512f(auVar734,auVar833,(undefined1  [64])_ps512_cephes_log_p3);
        auVar734 = vfmadd213ps_avx512f(auVar734,auVar833,(undefined1  [64])_ps512_cephes_log_p4);
        auVar734 = vfmadd213ps_avx512f(auVar734,auVar833,(undefined1  [64])_ps512_cephes_log_p5);
        auVar734 = vfmadd213ps_avx512f(auVar734,auVar833,(undefined1  [64])_ps512_cephes_log_p6);
        auVar734 = vfmadd213ps_avx512f(auVar734,auVar833,(undefined1  [64])_ps512_cephes_log_p7);
        auVar734 = vfmadd213ps_avx512f(auVar734,auVar833,(undefined1  [64])_ps512_cephes_log_p8);
        auVar716 = vmulps_avx512f(auVar833,auVar833);
        auVar719 = vmulps_avx512f(auVar716,auVar833);
        auVar734 = vmulps_avx512f(auVar719,auVar734);
        auVar734 = vfmadd231ps_avx512f(auVar734,auVar832,(undefined1  [64])_ps512_cephes_log_q1);
        auVar734 = vfmsub231ps_avx512f(auVar734,auVar717,auVar716);
        auVar734 = vsubps_avx512f(auVar734,auVar833);
        auVar734 = vfmsub231ps_avx512f(auVar734,(undefined1  [64])_ps512_cephes_log_q2,auVar832);
        auVar716 = vpternlogd_avx512f(auVar716,auVar716,auVar716,0xff);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar834._0_4_ = (uint)bVar12 * auVar716._0_4_ | (uint)!bVar12 * auVar734._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar834._4_4_ = (uint)bVar12 * auVar716._4_4_ | (uint)!bVar12 * auVar734._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar834._8_4_ = (uint)bVar12 * auVar716._8_4_ | (uint)!bVar12 * auVar734._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar834._12_4_ = (uint)bVar12 * auVar716._12_4_ | (uint)!bVar12 * auVar734._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar834._16_4_ = (uint)bVar12 * auVar716._16_4_ | (uint)!bVar12 * auVar734._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar834._20_4_ = (uint)bVar12 * auVar716._20_4_ | (uint)!bVar12 * auVar734._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar834._24_4_ = (uint)bVar12 * auVar716._24_4_ | (uint)!bVar12 * auVar734._24_4_;
        bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
        auVar834._28_4_ = (uint)bVar12 * auVar716._28_4_ | (uint)!bVar12 * auVar734._28_4_;
        bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
        auVar834._32_4_ = (uint)bVar12 * auVar716._32_4_ | (uint)!bVar12 * auVar734._32_4_;
        bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
        auVar834._36_4_ = (uint)bVar12 * auVar716._36_4_ | (uint)!bVar12 * auVar734._36_4_;
        bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
        auVar834._40_4_ = (uint)bVar12 * auVar716._40_4_ | (uint)!bVar12 * auVar734._40_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
        auVar834._44_4_ = (uint)bVar12 * auVar716._44_4_ | (uint)!bVar12 * auVar734._44_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
        auVar834._48_4_ = (uint)bVar12 * auVar716._48_4_ | (uint)!bVar12 * auVar734._48_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
        auVar834._52_4_ = (uint)bVar12 * auVar716._52_4_ | (uint)!bVar12 * auVar734._52_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
        auVar834._56_4_ = (uint)bVar12 * auVar716._56_4_ | (uint)!bVar12 * auVar734._56_4_;
        bVar12 = SUB81(uVar47 >> 0xf,0);
        auVar834._60_4_ = (uint)bVar12 * auVar716._60_4_ | (uint)!bVar12 * auVar734._60_4_;
        auVar734 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar716 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar734);
        auVar734 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar734);
        iVar426 = 1;
        do {
          fVar890 = *ptr1;
          auVar677 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
          auVar719 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar677,
                                1);
          auVar719 = vmulps_avx512f(auVar719,auVar834);
          auVar719 = vminps_avx512f(auVar719,(undefined1  [64])afVar408);
          auVar719 = vmaxps_avx512f(auVar719,(undefined1  [64])afVar409);
          auVar720 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar719,auVar717);
          auVar721 = vrndscaleps_avx512f(auVar720,1);
          uVar47 = vcmpps_avx512f(auVar720,auVar721,1);
          auVar720 = vsubps_avx512f(auVar721,(undefined1  [64])afVar407);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar835._0_4_ = (uint)bVar12 * auVar720._0_4_ | (uint)!bVar12 * auVar721._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar835._4_4_ = (uint)bVar12 * auVar720._4_4_ | (uint)!bVar12 * auVar721._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar835._8_4_ = (uint)bVar12 * auVar720._8_4_ | (uint)!bVar12 * auVar721._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar835._12_4_ = (uint)bVar12 * auVar720._12_4_ | (uint)!bVar12 * auVar721._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar835._16_4_ = (uint)bVar12 * auVar720._16_4_ | (uint)!bVar12 * auVar721._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar835._20_4_ = (uint)bVar12 * auVar720._20_4_ | (uint)!bVar12 * auVar721._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar835._24_4_ = (uint)bVar12 * auVar720._24_4_ | (uint)!bVar12 * auVar721._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar835._28_4_ = (uint)bVar12 * auVar720._28_4_ | (uint)!bVar12 * auVar721._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar835._32_4_ = (uint)bVar12 * auVar720._32_4_ | (uint)!bVar12 * auVar721._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar835._36_4_ = (uint)bVar12 * auVar720._36_4_ | (uint)!bVar12 * auVar721._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar835._40_4_ = (uint)bVar12 * auVar720._40_4_ | (uint)!bVar12 * auVar721._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar835._44_4_ = (uint)bVar12 * auVar720._44_4_ | (uint)!bVar12 * auVar721._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar835._48_4_ = (uint)bVar12 * auVar720._48_4_ | (uint)!bVar12 * auVar721._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar835._52_4_ = (uint)bVar12 * auVar720._52_4_ | (uint)!bVar12 * auVar721._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar835._56_4_ = (uint)bVar12 * auVar720._56_4_ | (uint)!bVar12 * auVar721._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar835._60_4_ = (uint)bVar12 * auVar720._60_4_ | (uint)!bVar12 * auVar721._60_4_;
          auVar719 = vfmadd231ps_avx512f(auVar719,auVar835,auVar716);
          auVar719 = vfmadd231ps_avx512f(auVar719,auVar835,auVar734);
          auVar720 = vfmadd213ps_avx512f(auVar719,(undefined1  [64])afVar411,
                                         (undefined1  [64])afVar412);
          auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar413);
          auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar414);
          auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar415);
          auVar721 = vmulps_avx512f(auVar719,auVar719);
          auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,auVar717);
          auVar719 = vfmadd213ps_avx512f(auVar720,auVar721,auVar719);
          auVar720 = vcvttps2dq_avx512f(auVar835);
          auVar719 = vaddps_avx512f(auVar719,(undefined1  [64])afVar407);
          auVar720 = vpaddd_avx512f(auVar720,auVar718);
          auVar720 = vpslld_avx512f(auVar720,0x17);
          auVar719 = vmulps_avx512f(auVar719,auVar720);
          *(undefined1 (*) [64])outptr = auVar719;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
          iVar426 = iVar426 + 2;
        } while (iVar426 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffe;
      }
      iVar426 = uVar425 - uVar427;
      if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
        auVar285._8_4_ = 0x800000;
        auVar285._0_8_ = 0x80000000800000;
        auVar285._12_4_ = 0x800000;
        auVar285._16_4_ = 0x800000;
        auVar285._20_4_ = 0x800000;
        auVar285._24_4_ = 0x800000;
        auVar285._28_4_ = 0x800000;
        auVar677 = vmaxps_avx512vl(auVar674,auVar285);
        auVar562 = vpsrld_avx2(auVar677,0x17);
        auVar1145._8_4_ = 0x3f000000;
        auVar1145._0_8_ = 0x3f0000003f000000;
        auVar1145._12_4_ = 0x3f000000;
        auVar1145._16_4_ = 0x3f000000;
        auVar1145._20_4_ = 0x3f000000;
        auVar1145._24_4_ = 0x3f000000;
        auVar1145._28_4_ = 0x3f000000;
        auVar286._8_4_ = 0x807fffff;
        auVar286._0_8_ = 0x807fffff807fffff;
        auVar286._12_4_ = 0x807fffff;
        auVar286._16_4_ = 0x807fffff;
        auVar286._20_4_ = 0x807fffff;
        auVar286._24_4_ = 0x807fffff;
        auVar286._28_4_ = 0x807fffff;
        auVar678 = vpternlogd_avx512vl(auVar1145,auVar677,auVar286,0xf8);
        auVar287._8_4_ = 0xffffff82;
        auVar287._0_8_ = 0xffffff82ffffff82;
        auVar287._12_4_ = 0xffffff82;
        auVar287._16_4_ = 0xffffff82;
        auVar287._20_4_ = 0xffffff82;
        auVar287._24_4_ = 0xffffff82;
        auVar287._28_4_ = 0xffffff82;
        auVar677 = vpaddd_avx512vl(auVar562,auVar287);
        auVar677 = vcvtdq2ps_avx(auVar677);
        auVar288._8_4_ = 0x3f3504f3;
        auVar288._0_8_ = 0x3f3504f33f3504f3;
        auVar288._12_4_ = 0x3f3504f3;
        auVar288._16_4_ = 0x3f3504f3;
        auVar288._20_4_ = 0x3f3504f3;
        auVar288._24_4_ = 0x3f3504f3;
        auVar288._28_4_ = 0x3f3504f3;
        uVar47 = vcmpps_avx512vl(auVar678,auVar288,1);
        auVar1020._8_4_ = 0xbf800000;
        auVar1020._0_8_ = 0xbf800000bf800000;
        auVar1020._12_4_ = 0xbf800000;
        auVar1020._16_4_ = 0xbf800000;
        auVar1020._20_4_ = 0xbf800000;
        auVar1020._24_4_ = 0xbf800000;
        auVar1020._28_4_ = 0xbf800000;
        auVar1267._0_4_ = auVar678._0_4_ + -1.0;
        auVar1267._4_4_ = auVar678._4_4_ + -1.0;
        auVar1267._8_4_ = auVar678._8_4_ + -1.0;
        auVar1267._12_4_ = auVar678._12_4_ + -1.0;
        auVar1267._16_4_ = auVar678._16_4_ + -1.0;
        auVar1267._20_4_ = auVar678._20_4_ + -1.0;
        auVar1267._24_4_ = auVar678._24_4_ + -1.0;
        auVar1267._28_4_ = auVar678._28_4_ + -1.0;
        auVar562 = vaddps_avx512vl(auVar677,auVar1020);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar655._0_4_ = (uint)bVar12 * auVar562._0_4_ | (uint)!bVar12 * auVar677._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar655._4_4_ = (uint)bVar12 * auVar562._4_4_ | (uint)!bVar12 * auVar677._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar655._8_4_ = (uint)bVar12 * auVar562._8_4_ | (uint)!bVar12 * auVar677._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar655._12_4_ = (uint)bVar12 * auVar562._12_4_ | (uint)!bVar12 * auVar677._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar655._16_4_ = (uint)bVar12 * auVar562._16_4_ | (uint)!bVar12 * auVar677._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar655._20_4_ = (uint)bVar12 * auVar562._20_4_ | (uint)!bVar12 * auVar677._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar655._24_4_ = (uint)bVar12 * auVar562._24_4_ | (uint)!bVar12 * auVar677._24_4_;
        bVar12 = SUB81(uVar47 >> 7,0);
        auVar655._28_4_ = (uint)bVar12 * auVar562._28_4_ | (uint)!bVar12 * auVar677._28_4_;
        auVar677 = vaddps_avx512vl(auVar1267,auVar678);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar656._0_4_ =
             (float)((uint)bVar12 * auVar677._0_4_ | (uint)!bVar12 * (int)auVar1267._0_4_);
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar656._4_4_ =
             (float)((uint)bVar12 * auVar677._4_4_ | (uint)!bVar12 * (int)auVar1267._4_4_);
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar656._8_4_ =
             (float)((uint)bVar12 * auVar677._8_4_ | (uint)!bVar12 * (int)auVar1267._8_4_);
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar656._12_4_ =
             (float)((uint)bVar12 * auVar677._12_4_ | (uint)!bVar12 * (int)auVar1267._12_4_);
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar656._16_4_ =
             (float)((uint)bVar12 * auVar677._16_4_ | (uint)!bVar12 * (int)auVar1267._16_4_);
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar656._20_4_ =
             (float)((uint)bVar12 * auVar677._20_4_ | (uint)!bVar12 * (int)auVar1267._20_4_);
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar656._24_4_ =
             (float)((uint)bVar12 * auVar677._24_4_ | (uint)!bVar12 * (int)auVar1267._24_4_);
        bVar12 = SUB81(uVar47 >> 7,0);
        auVar656._28_4_ = (uint)bVar12 * auVar677._28_4_ | (uint)!bVar12 * (int)auVar1267._28_4_;
        auVar382._4_4_ = auVar656._4_4_ * auVar656._4_4_;
        auVar382._0_4_ = auVar656._0_4_ * auVar656._0_4_;
        auVar382._8_4_ = auVar656._8_4_ * auVar656._8_4_;
        auVar382._12_4_ = auVar656._12_4_ * auVar656._12_4_;
        auVar382._16_4_ = auVar656._16_4_ * auVar656._16_4_;
        auVar382._20_4_ = auVar656._20_4_ * auVar656._20_4_;
        auVar382._24_4_ = auVar656._24_4_ * auVar656._24_4_;
        auVar382._28_4_ = auVar678._28_4_;
        auVar1327._8_4_ = 0x3d9021bb;
        auVar1327._0_8_ = 0x3d9021bb3d9021bb;
        auVar1327._12_4_ = 0x3d9021bb;
        auVar1327._16_4_ = 0x3d9021bb;
        auVar1327._20_4_ = 0x3d9021bb;
        auVar1327._24_4_ = 0x3d9021bb;
        auVar1327._28_4_ = 0x3d9021bb;
        auVar289._8_4_ = 0xbdebd1b8;
        auVar289._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar289._12_4_ = 0xbdebd1b8;
        auVar289._16_4_ = 0xbdebd1b8;
        auVar289._20_4_ = 0xbdebd1b8;
        auVar289._24_4_ = 0xbdebd1b8;
        auVar289._28_4_ = 0xbdebd1b8;
        auVar677 = vfmadd213ps_avx512vl(auVar1327,auVar656,auVar289);
        auVar290._8_4_ = 0x3def251a;
        auVar290._0_8_ = 0x3def251a3def251a;
        auVar290._12_4_ = 0x3def251a;
        auVar290._16_4_ = 0x3def251a;
        auVar290._20_4_ = 0x3def251a;
        auVar290._24_4_ = 0x3def251a;
        auVar290._28_4_ = 0x3def251a;
        auVar677 = vfmadd213ps_avx512vl(auVar677,auVar656,auVar290);
        auVar291._8_4_ = 0xbdfe5d4f;
        auVar291._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar291._12_4_ = 0xbdfe5d4f;
        auVar291._16_4_ = 0xbdfe5d4f;
        auVar291._20_4_ = 0xbdfe5d4f;
        auVar291._24_4_ = 0xbdfe5d4f;
        auVar291._28_4_ = 0xbdfe5d4f;
        auVar677 = vfmadd213ps_avx512vl(auVar677,auVar656,auVar291);
        auVar292._8_4_ = 0x3e11e9bf;
        auVar292._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar292._12_4_ = 0x3e11e9bf;
        auVar292._16_4_ = 0x3e11e9bf;
        auVar292._20_4_ = 0x3e11e9bf;
        auVar292._24_4_ = 0x3e11e9bf;
        auVar292._28_4_ = 0x3e11e9bf;
        auVar677 = vfmadd213ps_avx512vl(auVar677,auVar656,auVar292);
        auVar293._8_4_ = 0xbe2aae50;
        auVar293._0_8_ = 0xbe2aae50be2aae50;
        auVar293._12_4_ = 0xbe2aae50;
        auVar293._16_4_ = 0xbe2aae50;
        auVar293._20_4_ = 0xbe2aae50;
        auVar293._24_4_ = 0xbe2aae50;
        auVar293._28_4_ = 0xbe2aae50;
        auVar677 = vfmadd213ps_avx512vl(auVar677,auVar656,auVar293);
        auVar294._8_4_ = 0x3e4cceac;
        auVar294._0_8_ = 0x3e4cceac3e4cceac;
        auVar294._12_4_ = 0x3e4cceac;
        auVar294._16_4_ = 0x3e4cceac;
        auVar294._20_4_ = 0x3e4cceac;
        auVar294._24_4_ = 0x3e4cceac;
        auVar294._28_4_ = 0x3e4cceac;
        auVar677 = vfmadd213ps_avx512vl(auVar677,auVar656,auVar294);
        auVar295._8_4_ = 0xbe7ffffc;
        auVar295._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar295._12_4_ = 0xbe7ffffc;
        auVar295._16_4_ = 0xbe7ffffc;
        auVar295._20_4_ = 0xbe7ffffc;
        auVar295._24_4_ = 0xbe7ffffc;
        auVar295._28_4_ = 0xbe7ffffc;
        auVar677 = vfmadd213ps_avx512vl(auVar677,auVar656,auVar295);
        auVar296._8_4_ = 0x3eaaaaaa;
        auVar296._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar296._12_4_ = 0x3eaaaaaa;
        auVar296._16_4_ = 0x3eaaaaaa;
        auVar296._20_4_ = 0x3eaaaaaa;
        auVar296._24_4_ = 0x3eaaaaaa;
        auVar296._28_4_ = 0x3eaaaaaa;
        auVar677 = vfmadd213ps_avx512vl(auVar677,auVar656,auVar296);
        auVar383._4_4_ = auVar656._4_4_ * auVar656._4_4_ * auVar656._4_4_ * auVar677._4_4_;
        auVar383._0_4_ = auVar656._0_4_ * auVar656._0_4_ * auVar656._0_4_ * auVar677._0_4_;
        auVar383._8_4_ = auVar656._8_4_ * auVar656._8_4_ * auVar656._8_4_ * auVar677._8_4_;
        auVar383._12_4_ = auVar656._12_4_ * auVar656._12_4_ * auVar656._12_4_ * auVar677._12_4_;
        auVar383._16_4_ = auVar656._16_4_ * auVar656._16_4_ * auVar656._16_4_ * auVar677._16_4_;
        auVar383._20_4_ = auVar656._20_4_ * auVar656._20_4_ * auVar656._20_4_ * auVar677._20_4_;
        auVar383._24_4_ = auVar656._24_4_ * auVar656._24_4_ * auVar656._24_4_ * auVar677._24_4_;
        auVar383._28_4_ = auVar677._28_4_;
        auVar297._8_4_ = 0xb95e8083;
        auVar297._0_8_ = 0xb95e8083b95e8083;
        auVar297._12_4_ = 0xb95e8083;
        auVar297._16_4_ = 0xb95e8083;
        auVar297._20_4_ = 0xb95e8083;
        auVar297._24_4_ = 0xb95e8083;
        auVar297._28_4_ = 0xb95e8083;
        auVar677 = vfmadd231ps_avx512vl(auVar383,auVar655,auVar297);
        auVar678 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        uVar47 = vcmpps_avx512vl(auVar674,auVar678,2);
        auVar298._8_4_ = 0x3f000000;
        auVar298._0_8_ = 0x3f0000003f000000;
        auVar298._12_4_ = 0x3f000000;
        auVar298._16_4_ = 0x3f000000;
        auVar298._20_4_ = 0x3f000000;
        auVar298._24_4_ = 0x3f000000;
        auVar298._28_4_ = 0x3f000000;
        auVar674 = vfmsub231ps_avx512vl(auVar677,auVar382,auVar298);
        auVar674 = vsubps_avx(auVar674,auVar656);
        auVar299._8_4_ = 0x3f318000;
        auVar299._0_8_ = 0x3f3180003f318000;
        auVar299._12_4_ = 0x3f318000;
        auVar299._16_4_ = 0x3f318000;
        auVar299._20_4_ = 0x3f318000;
        auVar299._24_4_ = 0x3f318000;
        auVar299._28_4_ = 0x3f318000;
        auVar677 = vfmsub231ps_avx512vl(auVar674,auVar655,auVar299);
        auVar674 = vpcmpeqd_avx2(auVar678,auVar678);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar657._0_4_ = (uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar677._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar657._4_4_ = (uint)bVar12 * auVar674._4_4_ | (uint)!bVar12 * auVar677._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar657._8_4_ = (uint)bVar12 * auVar674._8_4_ | (uint)!bVar12 * auVar677._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar657._12_4_ = (uint)bVar12 * auVar674._12_4_ | (uint)!bVar12 * auVar677._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar657._16_4_ = (uint)bVar12 * auVar674._16_4_ | (uint)!bVar12 * auVar677._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar657._20_4_ = (uint)bVar12 * auVar674._20_4_ | (uint)!bVar12 * auVar677._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar657._24_4_ = (uint)bVar12 * auVar674._24_4_ | (uint)!bVar12 * auVar677._24_4_;
        bVar12 = SUB81(uVar47 >> 7,0);
        auVar657._28_4_ = (uint)bVar12 * auVar674._28_4_ | (uint)!bVar12 * auVar677._28_4_;
        auVar1081._8_4_ = 0x42b0c0a5;
        auVar1081._0_8_ = 0x42b0c0a542b0c0a5;
        auVar1081._12_4_ = 0x42b0c0a5;
        auVar1081._16_4_ = 0x42b0c0a5;
        auVar1081._20_4_ = 0x42b0c0a5;
        auVar1081._24_4_ = 0x42b0c0a5;
        auVar1081._28_4_ = 0x42b0c0a5;
        auVar1146._8_4_ = 0xc2b0c0a5;
        auVar1146._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1146._12_4_ = 0xc2b0c0a5;
        auVar1146._16_4_ = 0xc2b0c0a5;
        auVar1146._20_4_ = 0xc2b0c0a5;
        auVar1146._24_4_ = 0xc2b0c0a5;
        auVar1146._28_4_ = 0xc2b0c0a5;
        auVar1206._8_4_ = 0x3f000000;
        auVar1206._0_8_ = 0x3f0000003f000000;
        auVar1206._12_4_ = 0x3f000000;
        auVar1206._16_4_ = 0x3f000000;
        auVar1206._20_4_ = 0x3f000000;
        auVar1206._24_4_ = 0x3f000000;
        auVar1206._28_4_ = 0x3f000000;
        auVar1268._8_4_ = 0x3fb8aa3b;
        auVar1268._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar1268._12_4_ = 0x3fb8aa3b;
        auVar1268._16_4_ = 0x3fb8aa3b;
        auVar1268._20_4_ = 0x3fb8aa3b;
        auVar1268._24_4_ = 0x3fb8aa3b;
        auVar1268._28_4_ = 0x3fb8aa3b;
        auVar1328._8_4_ = 0x3f318000;
        auVar1328._0_8_ = 0x3f3180003f318000;
        auVar1328._12_4_ = 0x3f318000;
        auVar1328._16_4_ = 0x3f318000;
        auVar1328._20_4_ = 0x3f318000;
        auVar1328._24_4_ = 0x3f318000;
        auVar1328._28_4_ = 0x3f318000;
        auVar1385._8_4_ = 0x395e8083;
        auVar1385._0_8_ = 0x395e8083395e8083;
        auVar1385._12_4_ = 0x395e8083;
        auVar1385._16_4_ = 0x395e8083;
        auVar1385._20_4_ = 0x395e8083;
        auVar1385._24_4_ = 0x395e8083;
        auVar1385._28_4_ = 0x395e8083;
        auVar1442._8_4_ = 0x39506967;
        auVar1442._0_8_ = 0x3950696739506967;
        auVar1442._12_4_ = 0x39506967;
        auVar1442._16_4_ = 0x39506967;
        auVar1442._20_4_ = 0x39506967;
        auVar1442._24_4_ = 0x39506967;
        auVar1442._28_4_ = 0x39506967;
        auVar1496._8_4_ = 0x3ab743ce;
        auVar1496._0_8_ = 0x3ab743ce3ab743ce;
        auVar1496._12_4_ = 0x3ab743ce;
        auVar1496._16_4_ = 0x3ab743ce;
        auVar1496._20_4_ = 0x3ab743ce;
        auVar1496._24_4_ = 0x3ab743ce;
        auVar1496._28_4_ = 0x3ab743ce;
        auVar1550._8_4_ = 0x3c088908;
        auVar1550._0_8_ = 0x3c0889083c088908;
        auVar1550._12_4_ = 0x3c088908;
        auVar1550._16_4_ = 0x3c088908;
        auVar1550._20_4_ = 0x3c088908;
        auVar1550._24_4_ = 0x3c088908;
        auVar1550._28_4_ = 0x3c088908;
        auVar1604._8_4_ = 0x3d2aa9c1;
        auVar1604._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar1604._12_4_ = 0x3d2aa9c1;
        auVar1604._16_4_ = 0x3d2aa9c1;
        auVar1604._20_4_ = 0x3d2aa9c1;
        auVar1604._24_4_ = 0x3d2aa9c1;
        auVar1604._28_4_ = 0x3d2aa9c1;
        auVar1658._8_4_ = 0x3e2aaaaa;
        auVar1658._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar1658._12_4_ = 0x3e2aaaaa;
        auVar1658._16_4_ = 0x3e2aaaaa;
        auVar1658._20_4_ = 0x3e2aaaaa;
        auVar1658._24_4_ = 0x3e2aaaaa;
        auVar1658._28_4_ = 0x3e2aaaaa;
        auVar1712._8_4_ = 0x3f800000;
        auVar1712._0_8_ = 0x3f8000003f800000;
        auVar1712._12_4_ = 0x3f800000;
        auVar1712._16_4_ = 0x3f800000;
        auVar1712._20_4_ = 0x3f800000;
        auVar1712._24_4_ = 0x3f800000;
        auVar1712._28_4_ = 0x3f800000;
        do {
          fVar890 = *ptr1;
          auVar300._4_4_ = fVar890;
          auVar300._0_4_ = fVar890;
          auVar300._8_4_ = fVar890;
          auVar300._12_4_ = fVar890;
          auVar300._16_4_ = fVar890;
          auVar300._20_4_ = fVar890;
          auVar300._24_4_ = fVar890;
          auVar300._28_4_ = fVar890;
          auVar674 = vmulps_avx512vl(auVar657,auVar300);
          auVar674 = vminps_avx(auVar674,auVar1081);
          auVar674 = vmaxps_avx(auVar674,auVar1146);
          auVar442 = vfmadd231ps_fma(auVar1206,auVar674,auVar1268);
          auVar677 = vrndscaleps_avx512vl(ZEXT1632(auVar442),1);
          uVar47 = vcmpps_avx512vl(ZEXT1632(auVar442),auVar677,1);
          auVar678 = vaddps_avx512vl(auVar677,auVar1020);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar658._0_4_ = (uint)bVar12 * auVar678._0_4_ | (uint)!bVar12 * auVar677._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar658._4_4_ = (uint)bVar12 * auVar678._4_4_ | (uint)!bVar12 * auVar677._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar658._8_4_ = (uint)bVar12 * auVar678._8_4_ | (uint)!bVar12 * auVar677._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar658._12_4_ = (uint)bVar12 * auVar678._12_4_ | (uint)!bVar12 * auVar677._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar658._16_4_ = (uint)bVar12 * auVar678._16_4_ | (uint)!bVar12 * auVar677._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar658._20_4_ = (uint)bVar12 * auVar678._20_4_ | (uint)!bVar12 * auVar677._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar658._24_4_ = (uint)bVar12 * auVar678._24_4_ | (uint)!bVar12 * auVar677._24_4_;
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar658._28_4_ = (uint)bVar12 * auVar678._28_4_ | (uint)!bVar12 * auVar677._28_4_;
          auVar674 = vfmsub231ps_avx512vl(auVar674,auVar658,auVar1328);
          auVar674 = vfmsub231ps_avx512vl(auVar674,auVar658,auVar1385);
          auVar442 = vfmadd213ps_fma(auVar1442,auVar674,auVar1496);
          auVar442 = vfmadd213ps_fma(ZEXT1632(auVar442),auVar674,auVar1550);
          auVar677 = vmulps_avx512vl(auVar674,auVar674);
          auVar442 = vfmadd213ps_fma(ZEXT1632(auVar442),auVar674,auVar1604);
          auVar442 = vfmadd213ps_fma(ZEXT1632(auVar442),auVar674,auVar1658);
          auVar442 = vfmadd213ps_fma(ZEXT1632(auVar442),auVar674,auVar1206);
          auVar677 = vfmadd213ps_avx512vl(ZEXT1632(auVar442),auVar677,auVar674);
          auVar674 = vcvttps2dq_avx512vl(auVar658);
          auVar674 = vpslld_avx2(auVar674,0x17);
          auVar674 = vpaddd_avx2(auVar674,auVar1712);
          auVar442 = vfmadd213ps_fma(auVar674,auVar677,auVar674);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar442);
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          iVar426 = iVar426 + -1;
        } while (iVar426 != 0);
      }
    }
    afVar415 = ::_ps512_cephes_exp_p4;
    afVar414 = ::_ps512_cephes_exp_p3;
    afVar413 = ::_ps512_cephes_exp_p2;
    afVar412 = ::_ps512_cephes_exp_p1;
    afVar411 = ::_ps512_cephes_exp_p0;
    afVar410 = ::_ps512_cephes_LOG2EF;
    afVar409 = ::_ps512_exp_lo;
    afVar408 = ::_ps512_exp_hi;
    afVar407 = ::_ps512_1;
    if (iVar424 != 4) {
      return;
    }
    auVar442 = *(undefined1 (*) [16])ptr;
    auVar933._16_16_ = auVar442;
    auVar933._0_16_ = auVar442;
    uVar427 = 0;
    if (3 < (int)uVar425) {
      auVar734 = vinserti64x4_avx512f(ZEXT3264(auVar933),auVar933,1);
      uVar47 = vcmpps_avx512f(auVar734,ZEXT1664(ZEXT816(0) << 0x40),2);
      auVar734 = vmaxps_avx512f(auVar734,(undefined1  [64])_ps512_min_norm_pos);
      auVar716 = vpsrld_avx512f(auVar734,0x17);
      auVar717 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
      auVar734 = vpternlogd_avx512f(auVar734,auVar717,(undefined1  [64])_ps512_inv_mant_mask,0xec);
      auVar718 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar716 = vpsubd_avx512f(auVar716,auVar718);
      auVar716 = vcvtdq2ps_avx512f(auVar716);
      uVar430 = vcmpps_avx512f(auVar734,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      auVar719 = vsubps_avx512f(auVar734,(undefined1  [64])::_ps512_1);
      auVar720 = vaddps_avx512f(auVar716,(undefined1  [64])::_ps512_1);
      bVar12 = (bool)((byte)uVar430 & 1);
      auVar836._0_4_ = (uint)bVar12 * auVar716._0_4_ | (uint)!bVar12 * auVar720._0_4_;
      bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
      auVar836._4_4_ = (uint)bVar12 * auVar716._4_4_ | (uint)!bVar12 * auVar720._4_4_;
      bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
      auVar836._8_4_ = (uint)bVar12 * auVar716._8_4_ | (uint)!bVar12 * auVar720._8_4_;
      bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
      auVar836._12_4_ = (uint)bVar12 * auVar716._12_4_ | (uint)!bVar12 * auVar720._12_4_;
      bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
      auVar836._16_4_ = (uint)bVar12 * auVar716._16_4_ | (uint)!bVar12 * auVar720._16_4_;
      bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
      auVar836._20_4_ = (uint)bVar12 * auVar716._20_4_ | (uint)!bVar12 * auVar720._20_4_;
      bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
      auVar836._24_4_ = (uint)bVar12 * auVar716._24_4_ | (uint)!bVar12 * auVar720._24_4_;
      bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
      auVar836._28_4_ = (uint)bVar12 * auVar716._28_4_ | (uint)!bVar12 * auVar720._28_4_;
      bVar29 = (byte)(uVar430 >> 8);
      bVar12 = (bool)(bVar29 & 1);
      auVar836._32_4_ = (uint)bVar12 * auVar716._32_4_ | (uint)!bVar12 * auVar720._32_4_;
      bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
      auVar836._36_4_ = (uint)bVar12 * auVar716._36_4_ | (uint)!bVar12 * auVar720._36_4_;
      bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
      auVar836._40_4_ = (uint)bVar12 * auVar716._40_4_ | (uint)!bVar12 * auVar720._40_4_;
      bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
      auVar836._44_4_ = (uint)bVar12 * auVar716._44_4_ | (uint)!bVar12 * auVar720._44_4_;
      bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
      auVar836._48_4_ = (uint)bVar12 * auVar716._48_4_ | (uint)!bVar12 * auVar720._48_4_;
      bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
      auVar836._52_4_ = (uint)bVar12 * auVar716._52_4_ | (uint)!bVar12 * auVar720._52_4_;
      bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
      auVar836._56_4_ = (uint)bVar12 * auVar716._56_4_ | (uint)!bVar12 * auVar720._56_4_;
      bVar12 = SUB81(uVar430 >> 0xf,0);
      auVar836._60_4_ = (uint)bVar12 * auVar716._60_4_ | (uint)!bVar12 * auVar720._60_4_;
      auVar734 = vaddps_avx512f(auVar719,auVar734);
      bVar12 = (bool)((byte)uVar430 & 1);
      auVar837._0_4_ = (uint)bVar12 * auVar734._0_4_ | (uint)!bVar12 * auVar719._0_4_;
      bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
      auVar837._4_4_ = (uint)bVar12 * auVar734._4_4_ | (uint)!bVar12 * auVar719._4_4_;
      bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
      auVar837._8_4_ = (uint)bVar12 * auVar734._8_4_ | (uint)!bVar12 * auVar719._8_4_;
      bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
      auVar837._12_4_ = (uint)bVar12 * auVar734._12_4_ | (uint)!bVar12 * auVar719._12_4_;
      bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
      auVar837._16_4_ = (uint)bVar12 * auVar734._16_4_ | (uint)!bVar12 * auVar719._16_4_;
      bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
      auVar837._20_4_ = (uint)bVar12 * auVar734._20_4_ | (uint)!bVar12 * auVar719._20_4_;
      bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
      auVar837._24_4_ = (uint)bVar12 * auVar734._24_4_ | (uint)!bVar12 * auVar719._24_4_;
      bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
      auVar837._28_4_ = (uint)bVar12 * auVar734._28_4_ | (uint)!bVar12 * auVar719._28_4_;
      bVar12 = (bool)(bVar29 & 1);
      auVar837._32_4_ = (uint)bVar12 * auVar734._32_4_ | (uint)!bVar12 * auVar719._32_4_;
      bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
      auVar837._36_4_ = (uint)bVar12 * auVar734._36_4_ | (uint)!bVar12 * auVar719._36_4_;
      bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
      auVar837._40_4_ = (uint)bVar12 * auVar734._40_4_ | (uint)!bVar12 * auVar719._40_4_;
      bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
      auVar837._44_4_ = (uint)bVar12 * auVar734._44_4_ | (uint)!bVar12 * auVar719._44_4_;
      bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
      auVar837._48_4_ = (uint)bVar12 * auVar734._48_4_ | (uint)!bVar12 * auVar719._48_4_;
      bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
      auVar837._52_4_ = (uint)bVar12 * auVar734._52_4_ | (uint)!bVar12 * auVar719._52_4_;
      bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
      auVar837._56_4_ = (uint)bVar12 * auVar734._56_4_ | (uint)!bVar12 * auVar719._56_4_;
      bVar12 = SUB81(uVar430 >> 0xf,0);
      auVar837._60_4_ = (uint)bVar12 * auVar734._60_4_ | (uint)!bVar12 * auVar719._60_4_;
      auVar734 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_log_p0,auVar837,
                                     (undefined1  [64])_ps512_cephes_log_p1);
      auVar734 = vfmadd213ps_avx512f(auVar734,auVar837,(undefined1  [64])_ps512_cephes_log_p2);
      auVar734 = vfmadd213ps_avx512f(auVar734,auVar837,(undefined1  [64])_ps512_cephes_log_p3);
      auVar734 = vfmadd213ps_avx512f(auVar734,auVar837,(undefined1  [64])_ps512_cephes_log_p4);
      auVar734 = vfmadd213ps_avx512f(auVar734,auVar837,(undefined1  [64])_ps512_cephes_log_p5);
      auVar734 = vfmadd213ps_avx512f(auVar734,auVar837,(undefined1  [64])_ps512_cephes_log_p6);
      auVar734 = vfmadd213ps_avx512f(auVar734,auVar837,(undefined1  [64])_ps512_cephes_log_p7);
      auVar734 = vfmadd213ps_avx512f(auVar734,auVar837,(undefined1  [64])_ps512_cephes_log_p8);
      auVar716 = vmulps_avx512f(auVar837,auVar837);
      auVar719 = vmulps_avx512f(auVar716,auVar837);
      auVar734 = vmulps_avx512f(auVar719,auVar734);
      auVar734 = vfmadd231ps_avx512f(auVar734,auVar836,(undefined1  [64])_ps512_cephes_log_q1);
      auVar734 = vfmsub231ps_avx512f(auVar734,auVar717,auVar716);
      auVar734 = vsubps_avx512f(auVar734,auVar837);
      auVar734 = vfmsub231ps_avx512f(auVar734,(undefined1  [64])_ps512_cephes_log_q2,auVar836);
      auVar716 = vpternlogd_avx512f(auVar716,auVar716,auVar716,0xff);
      bVar12 = (bool)((byte)uVar47 & 1);
      auVar838._0_4_ = (uint)bVar12 * auVar716._0_4_ | (uint)!bVar12 * auVar734._0_4_;
      bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
      auVar838._4_4_ = (uint)bVar12 * auVar716._4_4_ | (uint)!bVar12 * auVar734._4_4_;
      bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
      auVar838._8_4_ = (uint)bVar12 * auVar716._8_4_ | (uint)!bVar12 * auVar734._8_4_;
      bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar838._12_4_ = (uint)bVar12 * auVar716._12_4_ | (uint)!bVar12 * auVar734._12_4_;
      bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
      auVar838._16_4_ = (uint)bVar12 * auVar716._16_4_ | (uint)!bVar12 * auVar734._16_4_;
      bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
      auVar838._20_4_ = (uint)bVar12 * auVar716._20_4_ | (uint)!bVar12 * auVar734._20_4_;
      bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
      auVar838._24_4_ = (uint)bVar12 * auVar716._24_4_ | (uint)!bVar12 * auVar734._24_4_;
      bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
      auVar838._28_4_ = (uint)bVar12 * auVar716._28_4_ | (uint)!bVar12 * auVar734._28_4_;
      bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
      auVar838._32_4_ = (uint)bVar12 * auVar716._32_4_ | (uint)!bVar12 * auVar734._32_4_;
      bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
      auVar838._36_4_ = (uint)bVar12 * auVar716._36_4_ | (uint)!bVar12 * auVar734._36_4_;
      bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
      auVar838._40_4_ = (uint)bVar12 * auVar716._40_4_ | (uint)!bVar12 * auVar734._40_4_;
      bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
      auVar838._44_4_ = (uint)bVar12 * auVar716._44_4_ | (uint)!bVar12 * auVar734._44_4_;
      bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
      auVar838._48_4_ = (uint)bVar12 * auVar716._48_4_ | (uint)!bVar12 * auVar734._48_4_;
      bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
      auVar838._52_4_ = (uint)bVar12 * auVar716._52_4_ | (uint)!bVar12 * auVar734._52_4_;
      bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
      auVar838._56_4_ = (uint)bVar12 * auVar716._56_4_ | (uint)!bVar12 * auVar734._56_4_;
      bVar12 = SUB81(uVar47 >> 0xf,0);
      auVar838._60_4_ = (uint)bVar12 * auVar716._60_4_ | (uint)!bVar12 * auVar734._60_4_;
      auVar734 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar716 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar734);
      auVar734 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar734);
      iVar424 = 3;
      do {
        fVar890 = ptr1[2];
        auVar460 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[3]));
        auVar461 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
        auVar674 = vinsertf32x4_avx512vl
                             (ZEXT1632(CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(fVar890,fVar890))
                                                )),auVar460,1);
        auVar460 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
        auVar677 = vinsertf32x4_avx512vl(ZEXT1632(auVar461),auVar460,1);
        auVar719 = vinsertf64x4_avx512f(ZEXT3264(auVar677),auVar674,1);
        auVar719 = vmulps_avx512f(auVar719,auVar838);
        auVar719 = vminps_avx512f(auVar719,(undefined1  [64])afVar408);
        auVar719 = vmaxps_avx512f(auVar719,(undefined1  [64])afVar409);
        auVar720 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar719,auVar717);
        auVar721 = vrndscaleps_avx512f(auVar720,1);
        uVar47 = vcmpps_avx512f(auVar720,auVar721,1);
        auVar720 = vsubps_avx512f(auVar721,(undefined1  [64])afVar407);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar839._0_4_ = (uint)bVar12 * auVar720._0_4_ | (uint)!bVar12 * auVar721._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar839._4_4_ = (uint)bVar12 * auVar720._4_4_ | (uint)!bVar12 * auVar721._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar839._8_4_ = (uint)bVar12 * auVar720._8_4_ | (uint)!bVar12 * auVar721._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar839._12_4_ = (uint)bVar12 * auVar720._12_4_ | (uint)!bVar12 * auVar721._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar839._16_4_ = (uint)bVar12 * auVar720._16_4_ | (uint)!bVar12 * auVar721._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar839._20_4_ = (uint)bVar12 * auVar720._20_4_ | (uint)!bVar12 * auVar721._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar839._24_4_ = (uint)bVar12 * auVar720._24_4_ | (uint)!bVar12 * auVar721._24_4_;
        bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
        auVar839._28_4_ = (uint)bVar12 * auVar720._28_4_ | (uint)!bVar12 * auVar721._28_4_;
        bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
        auVar839._32_4_ = (uint)bVar12 * auVar720._32_4_ | (uint)!bVar12 * auVar721._32_4_;
        bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
        auVar839._36_4_ = (uint)bVar12 * auVar720._36_4_ | (uint)!bVar12 * auVar721._36_4_;
        bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
        auVar839._40_4_ = (uint)bVar12 * auVar720._40_4_ | (uint)!bVar12 * auVar721._40_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
        auVar839._44_4_ = (uint)bVar12 * auVar720._44_4_ | (uint)!bVar12 * auVar721._44_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
        auVar839._48_4_ = (uint)bVar12 * auVar720._48_4_ | (uint)!bVar12 * auVar721._48_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
        auVar839._52_4_ = (uint)bVar12 * auVar720._52_4_ | (uint)!bVar12 * auVar721._52_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
        auVar839._56_4_ = (uint)bVar12 * auVar720._56_4_ | (uint)!bVar12 * auVar721._56_4_;
        bVar12 = SUB81(uVar47 >> 0xf,0);
        auVar839._60_4_ = (uint)bVar12 * auVar720._60_4_ | (uint)!bVar12 * auVar721._60_4_;
        auVar719 = vfmadd231ps_avx512f(auVar719,auVar839,auVar716);
        auVar719 = vfmadd231ps_avx512f(auVar719,auVar839,auVar734);
        auVar720 = vfmadd213ps_avx512f(auVar719,(undefined1  [64])afVar411,
                                       (undefined1  [64])afVar412);
        auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar413);
        auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar414);
        auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar415);
        auVar721 = vmulps_avx512f(auVar719,auVar719);
        auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,auVar717);
        auVar719 = vfmadd213ps_avx512f(auVar720,auVar721,auVar719);
        auVar720 = vcvttps2dq_avx512f(auVar839);
        auVar719 = vaddps_avx512f(auVar719,(undefined1  [64])afVar407);
        auVar720 = vpaddd_avx512f(auVar720,auVar718);
        auVar720 = vpslld_avx512f(auVar720,0x17);
        auVar719 = vmulps_avx512f(auVar719,auVar720);
        *(undefined1 (*) [64])outptr = auVar719;
        ptr1 = ptr1 + 4;
        outptr = (float *)((long)outptr + 0x40);
        iVar424 = iVar424 + 4;
      } while (iVar424 < (int)uVar425);
      uVar427 = uVar425 & 0x7ffffffc;
    }
    if ((int)(uVar427 | 1) < (int)uVar425) {
      auVar301._8_4_ = 0x800000;
      auVar301._0_8_ = 0x80000000800000;
      auVar301._12_4_ = 0x800000;
      auVar301._16_4_ = 0x800000;
      auVar301._20_4_ = 0x800000;
      auVar301._24_4_ = 0x800000;
      auVar301._28_4_ = 0x800000;
      auVar674 = vmaxps_avx512vl(auVar933,auVar301);
      auVar678 = vpsrld_avx2(auVar674,0x17);
      auVar1147._8_4_ = 0x3f000000;
      auVar1147._0_8_ = 0x3f0000003f000000;
      auVar1147._12_4_ = 0x3f000000;
      auVar1147._16_4_ = 0x3f000000;
      auVar1147._20_4_ = 0x3f000000;
      auVar1147._24_4_ = 0x3f000000;
      auVar1147._28_4_ = 0x3f000000;
      auVar302._8_4_ = 0x807fffff;
      auVar302._0_8_ = 0x807fffff807fffff;
      auVar302._12_4_ = 0x807fffff;
      auVar302._16_4_ = 0x807fffff;
      auVar302._20_4_ = 0x807fffff;
      auVar302._24_4_ = 0x807fffff;
      auVar302._28_4_ = 0x807fffff;
      auVar677 = vpternlogd_avx512vl(auVar1147,auVar674,auVar302,0xf8);
      auVar303._8_4_ = 0xffffff82;
      auVar303._0_8_ = 0xffffff82ffffff82;
      auVar303._12_4_ = 0xffffff82;
      auVar303._16_4_ = 0xffffff82;
      auVar303._20_4_ = 0xffffff82;
      auVar303._24_4_ = 0xffffff82;
      auVar303._28_4_ = 0xffffff82;
      auVar674 = vpaddd_avx512vl(auVar678,auVar303);
      auVar674 = vcvtdq2ps_avx(auVar674);
      auVar304._8_4_ = 0x3f3504f3;
      auVar304._0_8_ = 0x3f3504f33f3504f3;
      auVar304._12_4_ = 0x3f3504f3;
      auVar304._16_4_ = 0x3f3504f3;
      auVar304._20_4_ = 0x3f3504f3;
      auVar304._24_4_ = 0x3f3504f3;
      auVar304._28_4_ = 0x3f3504f3;
      uVar47 = vcmpps_avx512vl(auVar677,auVar304,1);
      auVar1021._8_4_ = 0xbf800000;
      auVar1021._0_8_ = 0xbf800000bf800000;
      auVar1021._12_4_ = 0xbf800000;
      auVar1021._16_4_ = 0xbf800000;
      auVar1021._20_4_ = 0xbf800000;
      auVar1021._24_4_ = 0xbf800000;
      auVar1021._28_4_ = 0xbf800000;
      auVar1269._0_4_ = auVar677._0_4_ + -1.0;
      auVar1269._4_4_ = auVar677._4_4_ + -1.0;
      auVar1269._8_4_ = auVar677._8_4_ + -1.0;
      auVar1269._12_4_ = auVar677._12_4_ + -1.0;
      auVar1269._16_4_ = auVar677._16_4_ + -1.0;
      auVar1269._20_4_ = auVar677._20_4_ + -1.0;
      auVar1269._24_4_ = auVar677._24_4_ + -1.0;
      auVar1269._28_4_ = auVar677._28_4_ + -1.0;
      auVar678 = vaddps_avx512vl(auVar674,auVar1021);
      bVar12 = (bool)((byte)uVar47 & 1);
      auVar659._0_4_ = (uint)bVar12 * auVar678._0_4_ | (uint)!bVar12 * auVar674._0_4_;
      bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
      auVar659._4_4_ = (uint)bVar12 * auVar678._4_4_ | (uint)!bVar12 * auVar674._4_4_;
      bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
      auVar659._8_4_ = (uint)bVar12 * auVar678._8_4_ | (uint)!bVar12 * auVar674._8_4_;
      bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar659._12_4_ = (uint)bVar12 * auVar678._12_4_ | (uint)!bVar12 * auVar674._12_4_;
      bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
      auVar659._16_4_ = (uint)bVar12 * auVar678._16_4_ | (uint)!bVar12 * auVar674._16_4_;
      bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
      auVar659._20_4_ = (uint)bVar12 * auVar678._20_4_ | (uint)!bVar12 * auVar674._20_4_;
      bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
      auVar659._24_4_ = (uint)bVar12 * auVar678._24_4_ | (uint)!bVar12 * auVar674._24_4_;
      bVar12 = SUB81(uVar47 >> 7,0);
      auVar659._28_4_ = (uint)bVar12 * auVar678._28_4_ | (uint)!bVar12 * auVar674._28_4_;
      auVar674 = vaddps_avx512vl(auVar1269,auVar677);
      bVar12 = (bool)((byte)uVar47 & 1);
      auVar660._0_4_ = (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * (int)auVar1269._0_4_)
      ;
      bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
      auVar660._4_4_ = (float)((uint)bVar12 * auVar674._4_4_ | (uint)!bVar12 * (int)auVar1269._4_4_)
      ;
      bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
      auVar660._8_4_ = (float)((uint)bVar12 * auVar674._8_4_ | (uint)!bVar12 * (int)auVar1269._8_4_)
      ;
      bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar660._12_4_ =
           (float)((uint)bVar12 * auVar674._12_4_ | (uint)!bVar12 * (int)auVar1269._12_4_);
      bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
      auVar660._16_4_ =
           (float)((uint)bVar12 * auVar674._16_4_ | (uint)!bVar12 * (int)auVar1269._16_4_);
      bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
      auVar660._20_4_ =
           (float)((uint)bVar12 * auVar674._20_4_ | (uint)!bVar12 * (int)auVar1269._20_4_);
      bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
      auVar660._24_4_ =
           (float)((uint)bVar12 * auVar674._24_4_ | (uint)!bVar12 * (int)auVar1269._24_4_);
      bVar12 = SUB81(uVar47 >> 7,0);
      auVar660._28_4_ = (uint)bVar12 * auVar674._28_4_ | (uint)!bVar12 * (int)auVar1269._28_4_;
      auVar384._4_4_ = auVar660._4_4_ * auVar660._4_4_;
      auVar384._0_4_ = auVar660._0_4_ * auVar660._0_4_;
      auVar384._8_4_ = auVar660._8_4_ * auVar660._8_4_;
      auVar384._12_4_ = auVar660._12_4_ * auVar660._12_4_;
      auVar384._16_4_ = auVar660._16_4_ * auVar660._16_4_;
      auVar384._20_4_ = auVar660._20_4_ * auVar660._20_4_;
      auVar384._24_4_ = auVar660._24_4_ * auVar660._24_4_;
      auVar384._28_4_ = auVar677._28_4_;
      auVar1329._8_4_ = 0x3d9021bb;
      auVar1329._0_8_ = 0x3d9021bb3d9021bb;
      auVar1329._12_4_ = 0x3d9021bb;
      auVar1329._16_4_ = 0x3d9021bb;
      auVar1329._20_4_ = 0x3d9021bb;
      auVar1329._24_4_ = 0x3d9021bb;
      auVar1329._28_4_ = 0x3d9021bb;
      auVar305._8_4_ = 0xbdebd1b8;
      auVar305._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar305._12_4_ = 0xbdebd1b8;
      auVar305._16_4_ = 0xbdebd1b8;
      auVar305._20_4_ = 0xbdebd1b8;
      auVar305._24_4_ = 0xbdebd1b8;
      auVar305._28_4_ = 0xbdebd1b8;
      auVar674 = vfmadd213ps_avx512vl(auVar1329,auVar660,auVar305);
      auVar306._8_4_ = 0x3def251a;
      auVar306._0_8_ = 0x3def251a3def251a;
      auVar306._12_4_ = 0x3def251a;
      auVar306._16_4_ = 0x3def251a;
      auVar306._20_4_ = 0x3def251a;
      auVar306._24_4_ = 0x3def251a;
      auVar306._28_4_ = 0x3def251a;
      auVar674 = vfmadd213ps_avx512vl(auVar674,auVar660,auVar306);
      auVar307._8_4_ = 0xbdfe5d4f;
      auVar307._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar307._12_4_ = 0xbdfe5d4f;
      auVar307._16_4_ = 0xbdfe5d4f;
      auVar307._20_4_ = 0xbdfe5d4f;
      auVar307._24_4_ = 0xbdfe5d4f;
      auVar307._28_4_ = 0xbdfe5d4f;
      auVar674 = vfmadd213ps_avx512vl(auVar674,auVar660,auVar307);
      auVar308._8_4_ = 0x3e11e9bf;
      auVar308._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar308._12_4_ = 0x3e11e9bf;
      auVar308._16_4_ = 0x3e11e9bf;
      auVar308._20_4_ = 0x3e11e9bf;
      auVar308._24_4_ = 0x3e11e9bf;
      auVar308._28_4_ = 0x3e11e9bf;
      auVar674 = vfmadd213ps_avx512vl(auVar674,auVar660,auVar308);
      auVar309._8_4_ = 0xbe2aae50;
      auVar309._0_8_ = 0xbe2aae50be2aae50;
      auVar309._12_4_ = 0xbe2aae50;
      auVar309._16_4_ = 0xbe2aae50;
      auVar309._20_4_ = 0xbe2aae50;
      auVar309._24_4_ = 0xbe2aae50;
      auVar309._28_4_ = 0xbe2aae50;
      auVar674 = vfmadd213ps_avx512vl(auVar674,auVar660,auVar309);
      auVar310._8_4_ = 0x3e4cceac;
      auVar310._0_8_ = 0x3e4cceac3e4cceac;
      auVar310._12_4_ = 0x3e4cceac;
      auVar310._16_4_ = 0x3e4cceac;
      auVar310._20_4_ = 0x3e4cceac;
      auVar310._24_4_ = 0x3e4cceac;
      auVar310._28_4_ = 0x3e4cceac;
      auVar674 = vfmadd213ps_avx512vl(auVar674,auVar660,auVar310);
      auVar311._8_4_ = 0xbe7ffffc;
      auVar311._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar311._12_4_ = 0xbe7ffffc;
      auVar311._16_4_ = 0xbe7ffffc;
      auVar311._20_4_ = 0xbe7ffffc;
      auVar311._24_4_ = 0xbe7ffffc;
      auVar311._28_4_ = 0xbe7ffffc;
      auVar674 = vfmadd213ps_avx512vl(auVar674,auVar660,auVar311);
      auVar312._8_4_ = 0x3eaaaaaa;
      auVar312._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar312._12_4_ = 0x3eaaaaaa;
      auVar312._16_4_ = 0x3eaaaaaa;
      auVar312._20_4_ = 0x3eaaaaaa;
      auVar312._24_4_ = 0x3eaaaaaa;
      auVar312._28_4_ = 0x3eaaaaaa;
      auVar674 = vfmadd213ps_avx512vl(auVar674,auVar660,auVar312);
      auVar385._4_4_ = auVar660._4_4_ * auVar660._4_4_ * auVar660._4_4_ * auVar674._4_4_;
      auVar385._0_4_ = auVar660._0_4_ * auVar660._0_4_ * auVar660._0_4_ * auVar674._0_4_;
      auVar385._8_4_ = auVar660._8_4_ * auVar660._8_4_ * auVar660._8_4_ * auVar674._8_4_;
      auVar385._12_4_ = auVar660._12_4_ * auVar660._12_4_ * auVar660._12_4_ * auVar674._12_4_;
      auVar385._16_4_ = auVar660._16_4_ * auVar660._16_4_ * auVar660._16_4_ * auVar674._16_4_;
      auVar385._20_4_ = auVar660._20_4_ * auVar660._20_4_ * auVar660._20_4_ * auVar674._20_4_;
      auVar385._24_4_ = auVar660._24_4_ * auVar660._24_4_ * auVar660._24_4_ * auVar674._24_4_;
      auVar385._28_4_ = auVar674._28_4_;
      auVar313._8_4_ = 0xb95e8083;
      auVar313._0_8_ = 0xb95e8083b95e8083;
      auVar313._12_4_ = 0xb95e8083;
      auVar313._16_4_ = 0xb95e8083;
      auVar313._20_4_ = 0xb95e8083;
      auVar313._24_4_ = 0xb95e8083;
      auVar313._28_4_ = 0xb95e8083;
      auVar674 = vfmadd231ps_avx512vl(auVar385,auVar659,auVar313);
      uVar47 = vcmpps_avx512vl(auVar933,SUB6432(ZEXT1664((undefined1  [16])0x0),0),2);
      auVar314._8_4_ = 0x3f000000;
      auVar314._0_8_ = 0x3f0000003f000000;
      auVar314._12_4_ = 0x3f000000;
      auVar314._16_4_ = 0x3f000000;
      auVar314._20_4_ = 0x3f000000;
      auVar314._24_4_ = 0x3f000000;
      auVar314._28_4_ = 0x3f000000;
      auVar674 = vfmsub231ps_avx512vl(auVar674,auVar384,auVar314);
      auVar674 = vsubps_avx(auVar674,auVar660);
      auVar315._8_4_ = 0x3f318000;
      auVar315._0_8_ = 0x3f3180003f318000;
      auVar315._12_4_ = 0x3f318000;
      auVar315._16_4_ = 0x3f318000;
      auVar315._20_4_ = 0x3f318000;
      auVar315._24_4_ = 0x3f318000;
      auVar315._28_4_ = 0x3f318000;
      auVar677 = vfmsub231ps_avx512vl(auVar674,auVar659,auVar315);
      auVar674 = vpcmpeqd_avx2(auVar384,auVar384);
      bVar12 = (bool)((byte)uVar47 & 1);
      bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
      bVar16 = (bool)((byte)(uVar47 >> 4) & 1);
      bVar17 = (bool)((byte)(uVar47 >> 5) & 1);
      bVar18 = (bool)((byte)(uVar47 >> 6) & 1);
      auVar1148._8_4_ = 0x42b0c0a5;
      auVar1148._0_8_ = 0x42b0c0a542b0c0a5;
      auVar1148._12_4_ = 0x42b0c0a5;
      auVar1148._16_4_ = 0x42b0c0a5;
      auVar1148._20_4_ = 0x42b0c0a5;
      auVar1148._24_4_ = 0x42b0c0a5;
      auVar1148._28_4_ = 0x42b0c0a5;
      auVar1207._8_4_ = 0xc2b0c0a5;
      auVar1207._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar1207._12_4_ = 0xc2b0c0a5;
      auVar1207._16_4_ = 0xc2b0c0a5;
      auVar1207._20_4_ = 0xc2b0c0a5;
      auVar1207._24_4_ = 0xc2b0c0a5;
      auVar1207._28_4_ = 0xc2b0c0a5;
      auVar1270._8_4_ = 0x3f000000;
      auVar1270._0_8_ = 0x3f0000003f000000;
      auVar1270._12_4_ = 0x3f000000;
      auVar1270._16_4_ = 0x3f000000;
      auVar1270._20_4_ = 0x3f000000;
      auVar1270._24_4_ = 0x3f000000;
      auVar1270._28_4_ = 0x3f000000;
      auVar1330._8_4_ = 0x3fb8aa3b;
      auVar1330._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar1330._12_4_ = 0x3fb8aa3b;
      auVar1330._16_4_ = 0x3fb8aa3b;
      auVar1330._20_4_ = 0x3fb8aa3b;
      auVar1330._24_4_ = 0x3fb8aa3b;
      auVar1330._28_4_ = 0x3fb8aa3b;
      auVar1386._8_4_ = 0x3f318000;
      auVar1386._0_8_ = 0x3f3180003f318000;
      auVar1386._12_4_ = 0x3f318000;
      auVar1386._16_4_ = 0x3f318000;
      auVar1386._20_4_ = 0x3f318000;
      auVar1386._24_4_ = 0x3f318000;
      auVar1386._28_4_ = 0x3f318000;
      auVar1443._8_4_ = 0x395e8083;
      auVar1443._0_8_ = 0x395e8083395e8083;
      auVar1443._12_4_ = 0x395e8083;
      auVar1443._16_4_ = 0x395e8083;
      auVar1443._20_4_ = 0x395e8083;
      auVar1443._24_4_ = 0x395e8083;
      auVar1443._28_4_ = 0x395e8083;
      auVar1497._8_4_ = 0x39506967;
      auVar1497._0_8_ = 0x3950696739506967;
      auVar1497._12_4_ = 0x39506967;
      auVar1497._16_4_ = 0x39506967;
      auVar1497._20_4_ = 0x39506967;
      auVar1497._24_4_ = 0x39506967;
      auVar1497._28_4_ = 0x39506967;
      auVar1551._8_4_ = 0x3ab743ce;
      auVar1551._0_8_ = 0x3ab743ce3ab743ce;
      auVar1551._12_4_ = 0x3ab743ce;
      auVar1551._16_4_ = 0x3ab743ce;
      auVar1551._20_4_ = 0x3ab743ce;
      auVar1551._24_4_ = 0x3ab743ce;
      auVar1551._28_4_ = 0x3ab743ce;
      auVar1605._8_4_ = 0x3c088908;
      auVar1605._0_8_ = 0x3c0889083c088908;
      auVar1605._12_4_ = 0x3c088908;
      auVar1605._16_4_ = 0x3c088908;
      auVar1605._20_4_ = 0x3c088908;
      auVar1605._24_4_ = 0x3c088908;
      auVar1605._28_4_ = 0x3c088908;
      auVar1659._8_4_ = 0x3d2aa9c1;
      auVar1659._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar1659._12_4_ = 0x3d2aa9c1;
      auVar1659._16_4_ = 0x3d2aa9c1;
      auVar1659._20_4_ = 0x3d2aa9c1;
      auVar1659._24_4_ = 0x3d2aa9c1;
      auVar1659._28_4_ = 0x3d2aa9c1;
      auVar1713._8_4_ = 0x3e2aaaaa;
      auVar1713._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar1713._12_4_ = 0x3e2aaaaa;
      auVar1713._16_4_ = 0x3e2aaaaa;
      auVar1713._20_4_ = 0x3e2aaaaa;
      auVar1713._24_4_ = 0x3e2aaaaa;
      auVar1713._28_4_ = 0x3e2aaaaa;
      auVar1763._8_4_ = 0x3f800000;
      auVar1763._0_8_ = 0x3f8000003f800000;
      auVar1763._12_4_ = 0x3f800000;
      auVar1763._16_4_ = 0x3f800000;
      auVar1763._20_4_ = 0x3f800000;
      auVar1763._24_4_ = 0x3f800000;
      auVar1763._28_4_ = 0x3f800000;
      uVar882 = uVar427;
      do {
        fVar890 = *ptr1;
        auVar460 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
        auVar678 = vinsertf32x4_avx512vl
                             (ZEXT1632(CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(fVar890,fVar890))
                                                )),auVar460,1);
        auVar386._4_4_ =
             auVar678._4_4_ *
             (float)((uint)bVar13 * auVar674._4_4_ | (uint)!bVar13 * auVar677._4_4_);
        auVar386._0_4_ =
             auVar678._0_4_ *
             (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar677._0_4_);
        auVar386._8_4_ =
             auVar678._8_4_ *
             (float)((uint)bVar14 * auVar674._8_4_ | (uint)!bVar14 * auVar677._8_4_);
        auVar386._12_4_ =
             auVar678._12_4_ *
             (float)((uint)bVar15 * auVar674._12_4_ | (uint)!bVar15 * auVar677._12_4_);
        auVar386._16_4_ =
             auVar678._16_4_ *
             (float)((uint)bVar16 * auVar674._16_4_ | (uint)!bVar16 * auVar677._16_4_);
        auVar386._20_4_ =
             auVar678._20_4_ *
             (float)((uint)bVar17 * auVar674._20_4_ | (uint)!bVar17 * auVar677._20_4_);
        auVar386._24_4_ =
             auVar678._24_4_ *
             (float)((uint)bVar18 * auVar674._24_4_ | (uint)!bVar18 * auVar677._24_4_);
        auVar386._28_4_ = auVar678._28_4_;
        auVar678 = vminps_avx(auVar386,auVar1148);
        auVar678 = vmaxps_avx(auVar678,auVar1207);
        auVar562 = vfmadd231ps_avx512vl(auVar1270,auVar678,auVar1330);
        auVar679 = vrndscaleps_avx512vl(auVar562,1);
        uVar47 = vcmpps_avx512vl(auVar562,auVar679,1);
        auVar562 = vaddps_avx512vl(auVar679,auVar1021);
        bVar19 = (bool)((byte)uVar47 & 1);
        auVar661._0_4_ = (uint)bVar19 * auVar562._0_4_ | (uint)!bVar19 * auVar679._0_4_;
        bVar19 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar661._4_4_ = (uint)bVar19 * auVar562._4_4_ | (uint)!bVar19 * auVar679._4_4_;
        bVar19 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar661._8_4_ = (uint)bVar19 * auVar562._8_4_ | (uint)!bVar19 * auVar679._8_4_;
        bVar19 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar661._12_4_ = (uint)bVar19 * auVar562._12_4_ | (uint)!bVar19 * auVar679._12_4_;
        bVar19 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar661._16_4_ = (uint)bVar19 * auVar562._16_4_ | (uint)!bVar19 * auVar679._16_4_;
        bVar19 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar661._20_4_ = (uint)bVar19 * auVar562._20_4_ | (uint)!bVar19 * auVar679._20_4_;
        bVar19 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar661._24_4_ = (uint)bVar19 * auVar562._24_4_ | (uint)!bVar19 * auVar679._24_4_;
        bVar19 = SUB81(uVar47 >> 7,0);
        auVar661._28_4_ = (uint)bVar19 * auVar562._28_4_ | (uint)!bVar19 * auVar679._28_4_;
        auVar678 = vfmsub231ps_avx512vl(auVar678,auVar661,auVar1386);
        auVar678 = vfmsub231ps_avx512vl(auVar678,auVar661,auVar1443);
        auVar562 = vfmadd213ps_avx512vl(auVar1497,auVar678,auVar1551);
        auVar679 = vmulps_avx512vl(auVar678,auVar678);
        auVar562 = vfmadd213ps_avx512vl(auVar562,auVar678,auVar1605);
        auVar562 = vfmadd213ps_avx512vl(auVar562,auVar678,auVar1659);
        auVar562 = vfmadd213ps_avx512vl(auVar562,auVar678,auVar1713);
        auVar562 = vfmadd213ps_avx512vl(auVar562,auVar678,auVar1270);
        auVar562 = vfmadd213ps_avx512vl(auVar562,auVar679,auVar678);
        auVar678 = vcvttps2dq_avx512vl(auVar661);
        auVar678 = vpslld_avx2(auVar678,0x17);
        auVar678 = vpaddd_avx2(auVar678,auVar1763);
        auVar678 = vfmadd213ps_avx512vl(auVar678,auVar562,auVar678);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar678;
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar427 = uVar882 + 2;
        iVar424 = uVar882 + 3;
        uVar882 = uVar427;
      } while (iVar424 < (int)uVar425);
    }
    if ((int)uVar425 <= (int)uVar427) {
      return;
    }
    auVar143._8_4_ = 0x800000;
    auVar143._0_8_ = 0x80000000800000;
    auVar143._12_4_ = 0x800000;
    auVar460 = vmaxps_avx512vl(auVar442,auVar143);
    auVar1054._8_4_ = 0x3f000000;
    auVar1054._0_8_ = 0x3f0000003f000000;
    auVar1054._12_4_ = 0x3f000000;
    auVar144._8_4_ = 0x807fffff;
    auVar144._0_8_ = 0x807fffff807fffff;
    auVar144._12_4_ = 0x807fffff;
    auVar461 = vpternlogd_avx512vl(auVar1054,auVar460,auVar144,0xf8);
    auVar460 = vpsrld_avx(auVar460,0x17);
    auVar145._8_4_ = 0xffffff82;
    auVar145._0_8_ = 0xffffff82ffffff82;
    auVar145._12_4_ = 0xffffff82;
    auVar460 = vpaddd_avx512vl(auVar460,auVar145);
    auVar460 = vcvtdq2ps_avx(auVar460);
    auVar146._8_4_ = 0x3f3504f3;
    auVar146._0_8_ = 0x3f3504f33f3504f3;
    auVar146._12_4_ = 0x3f3504f3;
    uVar47 = vcmpps_avx512vl(auVar461,auVar146,1);
    auVar977._8_4_ = 0xbf800000;
    auVar977._0_8_ = 0xbf800000bf800000;
    auVar977._12_4_ = 0xbf800000;
    auVar1188._0_4_ = auVar461._0_4_ + -1.0;
    auVar1188._4_4_ = auVar461._4_4_ + -1.0;
    auVar1188._8_4_ = auVar461._8_4_ + -1.0;
    auVar1188._12_4_ = auVar461._12_4_ + -1.0;
    auVar519 = vaddps_avx512vl(auVar460,auVar977);
    bVar12 = (bool)((byte)uVar47 & 1);
    auVar546._0_4_ = (uint)bVar12 * auVar519._0_4_ | (uint)!bVar12 * auVar460._0_4_;
    bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
    auVar546._4_4_ = (uint)bVar12 * auVar519._4_4_ | (uint)!bVar12 * auVar460._4_4_;
    bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
    auVar546._8_4_ = (uint)bVar12 * auVar519._8_4_ | (uint)!bVar12 * auVar460._8_4_;
    bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
    auVar546._12_4_ = (uint)bVar12 * auVar519._12_4_ | (uint)!bVar12 * auVar460._12_4_;
    auVar460 = vaddps_avx512vl(auVar1188,auVar461);
    bVar12 = (bool)((byte)uVar47 & 1);
    auVar547._0_4_ = (float)((uint)bVar12 * auVar460._0_4_ | (uint)!bVar12 * (int)auVar1188._0_4_);
    bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
    auVar547._4_4_ = (float)((uint)bVar12 * auVar460._4_4_ | (uint)!bVar12 * (int)auVar1188._4_4_);
    bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
    auVar547._8_4_ = (float)((uint)bVar12 * auVar460._8_4_ | (uint)!bVar12 * (int)auVar1188._8_4_);
    bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
    auVar547._12_4_ =
         (float)((uint)bVar12 * auVar460._12_4_ | (uint)!bVar12 * (int)auVar1188._12_4_);
    auVar1055._0_4_ = auVar547._0_4_ * auVar547._0_4_;
    auVar1055._4_4_ = auVar547._4_4_ * auVar547._4_4_;
    auVar1055._8_4_ = auVar547._8_4_ * auVar547._8_4_;
    auVar1055._12_4_ = auVar547._12_4_ * auVar547._12_4_;
    auVar1242._8_4_ = 0x3d9021bb;
    auVar1242._0_8_ = 0x3d9021bb3d9021bb;
    auVar1242._12_4_ = 0x3d9021bb;
    auVar147._8_4_ = 0xbdebd1b8;
    auVar147._0_8_ = 0xbdebd1b8bdebd1b8;
    auVar147._12_4_ = 0xbdebd1b8;
    auVar460 = vfmadd213ps_avx512vl(auVar1242,auVar547,auVar147);
    auVar148._8_4_ = 0x3def251a;
    auVar148._0_8_ = 0x3def251a3def251a;
    auVar148._12_4_ = 0x3def251a;
    auVar460 = vfmadd213ps_avx512vl(auVar460,auVar547,auVar148);
    auVar149._8_4_ = 0xbdfe5d4f;
    auVar149._0_8_ = 0xbdfe5d4fbdfe5d4f;
    auVar149._12_4_ = 0xbdfe5d4f;
    auVar460 = vfmadd213ps_avx512vl(auVar460,auVar547,auVar149);
    auVar150._8_4_ = 0x3e11e9bf;
    auVar150._0_8_ = 0x3e11e9bf3e11e9bf;
    auVar150._12_4_ = 0x3e11e9bf;
    auVar460 = vfmadd213ps_avx512vl(auVar460,auVar547,auVar150);
    auVar151._8_4_ = 0xbe2aae50;
    auVar151._0_8_ = 0xbe2aae50be2aae50;
    auVar151._12_4_ = 0xbe2aae50;
    auVar460 = vfmadd213ps_avx512vl(auVar460,auVar547,auVar151);
    auVar152._8_4_ = 0x3e4cceac;
    auVar152._0_8_ = 0x3e4cceac3e4cceac;
    auVar152._12_4_ = 0x3e4cceac;
    auVar460 = vfmadd213ps_avx512vl(auVar460,auVar547,auVar152);
    auVar153._8_4_ = 0xbe7ffffc;
    auVar153._0_8_ = 0xbe7ffffcbe7ffffc;
    auVar153._12_4_ = 0xbe7ffffc;
    auVar460 = vfmadd213ps_avx512vl(auVar460,auVar547,auVar153);
    auVar154._8_4_ = 0x3eaaaaaa;
    auVar154._0_8_ = 0x3eaaaaaa3eaaaaaa;
    auVar154._12_4_ = 0x3eaaaaaa;
    auVar460 = vfmadd213ps_avx512vl(auVar460,auVar547,auVar154);
    auVar1243._0_4_ = auVar1055._0_4_ * auVar547._0_4_ * auVar460._0_4_;
    auVar1243._4_4_ = auVar1055._4_4_ * auVar547._4_4_ * auVar460._4_4_;
    auVar1243._8_4_ = auVar1055._8_4_ * auVar547._8_4_ * auVar460._8_4_;
    auVar1243._12_4_ = auVar1055._12_4_ * auVar547._12_4_ * auVar460._12_4_;
    auVar155._8_4_ = 0xb95e8083;
    auVar155._0_8_ = 0xb95e8083b95e8083;
    auVar155._12_4_ = 0xb95e8083;
    auVar460 = vfmadd231ps_avx512vl(auVar1243,auVar546,auVar155);
    auVar156._8_4_ = 0x3f000000;
    auVar156._0_8_ = 0x3f0000003f000000;
    auVar156._12_4_ = 0x3f000000;
    auVar460 = vfmsub231ps_avx512vl(auVar460,auVar1055,auVar156);
    auVar460 = vsubps_avx(auVar460,auVar547);
    auVar157._8_4_ = 0x3f318000;
    auVar157._0_8_ = 0x3f3180003f318000;
    auVar157._12_4_ = 0x3f318000;
    auVar460 = vfmsub231ps_avx512vl(auVar460,auVar546,auVar157);
    uVar47 = vcmpps_avx512vl(auVar442,ZEXT416(0) << 0x20,2);
    auVar442 = vpcmpeqd_avx(auVar442,auVar442);
    bVar12 = (bool)((byte)uVar47 & 1);
    auVar548._0_4_ = (uint)bVar12 * auVar442._0_4_ | (uint)!bVar12 * auVar460._0_4_;
    bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
    auVar548._4_4_ = (uint)bVar12 * auVar442._4_4_ | (uint)!bVar12 * auVar460._4_4_;
    bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
    auVar548._8_4_ = (uint)bVar12 * auVar442._8_4_ | (uint)!bVar12 * auVar460._8_4_;
    bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
    auVar548._12_4_ = (uint)bVar12 * auVar442._12_4_ | (uint)!bVar12 * auVar460._12_4_;
    lVar428 = 0;
    auVar909._8_4_ = 0x42b0c0a5;
    auVar909._0_8_ = 0x42b0c0a542b0c0a5;
    auVar909._12_4_ = 0x42b0c0a5;
    auVar1132._8_4_ = 0xc2b0c0a5;
    auVar1132._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar1132._12_4_ = 0xc2b0c0a5;
    auVar1189._8_4_ = 0x3f000000;
    auVar1189._0_8_ = 0x3f0000003f000000;
    auVar1189._12_4_ = 0x3f000000;
    auVar1244._8_4_ = 0x3fb8aa3b;
    auVar1244._0_8_ = 0x3fb8aa3b3fb8aa3b;
    auVar1244._12_4_ = 0x3fb8aa3b;
    auVar1306._8_4_ = 0x3f318000;
    auVar1306._0_8_ = 0x3f3180003f318000;
    auVar1306._12_4_ = 0x3f318000;
    auVar1365._8_4_ = 0x395e8083;
    auVar1365._0_8_ = 0x395e8083395e8083;
    auVar1365._12_4_ = 0x395e8083;
    auVar1421._8_4_ = 0x39506967;
    auVar1421._0_8_ = 0x3950696739506967;
    auVar1421._12_4_ = 0x39506967;
    auVar1475._8_4_ = 0x3ab743ce;
    auVar1475._0_8_ = 0x3ab743ce3ab743ce;
    auVar1475._12_4_ = 0x3ab743ce;
    auVar1529._8_4_ = 0x3c088908;
    auVar1529._0_8_ = 0x3c0889083c088908;
    auVar1529._12_4_ = 0x3c088908;
    auVar1583._8_4_ = 0x3d2aa9c1;
    auVar1583._0_8_ = 0x3d2aa9c13d2aa9c1;
    auVar1583._12_4_ = 0x3d2aa9c1;
    auVar1637._8_4_ = 0x3e2aaaaa;
    auVar1637._0_8_ = 0x3e2aaaaa3e2aaaaa;
    auVar1637._12_4_ = 0x3e2aaaaa;
    auVar1691._8_4_ = 0x3f800000;
    auVar1691._0_8_ = 0x3f8000003f800000;
    auVar1691._12_4_ = 0x3f800000;
    do {
      fVar890 = ptr1[lVar428];
      auVar158._4_4_ = fVar890;
      auVar158._0_4_ = fVar890;
      auVar158._8_4_ = fVar890;
      auVar158._12_4_ = fVar890;
      auVar442 = vmulps_avx512vl(auVar548,auVar158);
      auVar442 = vminps_avx(auVar442,auVar909);
      auVar442 = vmaxps_avx(auVar442,auVar1132);
      auVar460 = vfmadd231ps_fma(auVar1189,auVar442,auVar1244);
      auVar461 = vcvttps2dq_avx512vl(auVar460);
      auVar461 = vcvtdq2ps_avx512vl(auVar461);
      uVar47 = vcmpps_avx512vl(auVar460,auVar461,1);
      auVar460 = vaddps_avx512vl(auVar461,auVar977);
      bVar12 = (bool)((byte)uVar47 & 1);
      auVar549._0_4_ = (uint)bVar12 * auVar460._0_4_ | (uint)!bVar12 * auVar461._0_4_;
      bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
      auVar549._4_4_ = (uint)bVar12 * auVar460._4_4_ | (uint)!bVar12 * auVar461._4_4_;
      bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
      auVar549._8_4_ = (uint)bVar12 * auVar460._8_4_ | (uint)!bVar12 * auVar461._8_4_;
      bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar549._12_4_ = (uint)bVar12 * auVar460._12_4_ | (uint)!bVar12 * auVar461._12_4_;
      auVar442 = vfmsub231ps_avx512vl(auVar442,auVar549,auVar1306);
      auVar460 = vfmsub231ps_avx512vl(auVar442,auVar549,auVar1365);
      auVar442 = vfmadd213ps_fma(auVar1421,auVar460,auVar1475);
      auVar442 = vfmadd213ps_fma(auVar442,auVar460,auVar1529);
      auVar461 = vmulps_avx512vl(auVar460,auVar460);
      auVar442 = vfmadd213ps_fma(auVar442,auVar460,auVar1583);
      auVar442 = vfmadd213ps_fma(auVar442,auVar460,auVar1637);
      auVar442 = vfmadd213ps_fma(auVar442,auVar460,auVar1189);
      auVar460 = vfmadd213ps_avx512vl(auVar442,auVar461,auVar460);
      auVar442 = vcvttps2dq_avx512vl(auVar549);
      auVar442 = vpslld_avx(auVar442,0x17);
      auVar442 = vpaddd_avx(auVar442,auVar1691);
      auVar442 = vfmadd213ps_fma(auVar442,auVar460,auVar442);
      *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      lVar428 = lVar428 + 1;
    } while (uVar425 - uVar427 != (int)lVar428);
    return;
  case 7:
    uVar425 = bw;
    if (bw < aw) {
      uVar425 = aw;
    }
    iVar424 = bp;
    if (bp < ap) {
      iVar424 = ap;
    }
    uVar427 = iVar424 * uVar425;
    if (ap == bp) {
      if (aw == bw) {
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar734 = vsubps_avx512f(*(undefined1 (*) [64])ptr1,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar734;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar674 = vsubps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1,
                                *(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          auVar442 = vsubps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1,
                                *(undefined1 (*) [16])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               *(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4) -
               *(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (bw == 1) {
        fVar890 = *ptr1;
        if (iVar424 == 4) {
          auVar946 = *(undefined1 (*) [16])ptr1;
        }
        else {
          auVar946._4_4_ = fVar890;
          auVar946._0_4_ = fVar890;
          auVar946._8_4_ = fVar890;
          auVar946._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1087 = *(undefined1 (*) [32])ptr1;
        }
        else {
          auVar1087._16_16_ = auVar946;
          auVar1087._0_16_ = auVar946;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr1;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1087),auVar1087,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar716 = vsubps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar674 = vsubps_avx(auVar1087,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          auVar442 = vsubps_avx(auVar946,*(undefined1 (*) [16])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               fVar890 - *(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (aw == 1) {
        fVar890 = *ptr;
        if (iVar424 == 4) {
          auVar969 = *(undefined1 (*) [16])ptr;
        }
        else {
          auVar969._4_4_ = fVar890;
          auVar969._0_4_ = fVar890;
          auVar969._8_4_ = fVar890;
          auVar969._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1101 = *(undefined1 (*) [32])ptr;
        }
        else {
          auVar1101._16_16_ = auVar969;
          auVar1101._0_16_ = auVar969;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1101),auVar1101,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar716 = vsubps_avx512f(*(undefined1 (*) [64])ptr1,auVar734);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar674 = vsubps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1,auVar1101);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          auVar442 = vsubps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1,auVar969);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               *(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4) - fVar890;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
    }
    if (bp != 1) {
      return;
    }
    if (aw != bw) {
      if (bw == 1) {
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          auVar734 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          iVar424 = 0xf;
          do {
            auVar716 = vsubps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        if ((int)(uVar425 | 7) < (int)uVar427) {
          fVar890 = *ptr1;
          auVar920._4_4_ = fVar890;
          auVar920._0_4_ = fVar890;
          auVar920._8_4_ = fVar890;
          auVar920._12_4_ = fVar890;
          auVar920._16_4_ = fVar890;
          auVar920._20_4_ = fVar890;
          auVar920._24_4_ = fVar890;
          auVar920._28_4_ = fVar890;
          uVar882 = uVar425;
          do {
            auVar674 = vsubps_avx(auVar920,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)uVar427 <= (int)(uVar425 | 3)) {
          return;
        }
        fVar890 = *ptr1;
        auVar899._4_4_ = fVar890;
        auVar899._0_4_ = fVar890;
        auVar899._8_4_ = fVar890;
        auVar899._12_4_ = fVar890;
        lVar428 = 0;
        do {
          auVar442 = vsubps_avx(auVar899,*(undefined1 (*) [16])
                                          (*(undefined1 (*) [64])ptr + lVar428 * 4));
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar442;
          lVar428 = lVar428 + 4;
        } while ((int)(uVar425 + 3 + (int)lVar428) < (int)uVar427);
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar424 == 0x10) {
        auVar734 = *(undefined1 (*) [64])ptr;
        uVar427 = uVar425;
        do {
          auVar716 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          auVar716 = vsubps_avx512f(auVar716,auVar734);
          *(undefined1 (*) [64])outptr = auVar716;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar427 = uVar427 - 1;
        } while (uVar427 != 0);
      }
      if (iVar424 == 8) {
        auVar734 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        uVar427 = 0;
        if (1 < (int)uVar425) {
          iVar426 = 1;
          do {
            fVar890 = *ptr1;
            fVar891 = ptr1[1];
            auVar1074._4_4_ = fVar891;
            auVar1074._0_4_ = fVar891;
            auVar1074._8_4_ = fVar891;
            auVar1074._12_4_ = fVar891;
            auVar1074._16_4_ = fVar891;
            auVar1074._20_4_ = fVar891;
            auVar1074._24_4_ = fVar891;
            auVar1074._28_4_ = fVar891;
            auVar716 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar1074
                                  ,1);
            auVar716 = vsubps_avx512f(auVar716,auVar734);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar426 = iVar426 + 2;
          } while (iVar426 < (int)uVar425);
          uVar427 = uVar425 & 0x7ffffffe;
        }
        iVar426 = uVar425 - uVar427;
        if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
          do {
            fVar890 = *ptr1;
            auVar1012._4_4_ = fVar890;
            auVar1012._0_4_ = fVar890;
            auVar1012._8_4_ = fVar890;
            auVar1012._12_4_ = fVar890;
            auVar1012._16_4_ = fVar890;
            auVar1012._20_4_ = fVar890;
            auVar1012._24_4_ = fVar890;
            auVar1012._28_4_ = fVar890;
            auVar674 = vsubps_avx(auVar1012,auVar734._0_32_);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar426 = iVar426 + -1;
          } while (iVar426 != 0);
        }
      }
      if (iVar424 != 4) {
        return;
      }
      auVar734 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      uVar427 = 0;
      if (3 < (int)uVar425) {
        iVar424 = 3;
        do {
          fVar890 = ptr1[2];
          auVar1013._4_4_ = fVar890;
          auVar1013._0_4_ = fVar890;
          auVar1013._8_4_ = fVar890;
          auVar1013._12_4_ = fVar890;
          fVar890 = ptr1[3];
          auVar1013._20_4_ = fVar890;
          auVar1013._16_4_ = fVar890;
          auVar1013._24_4_ = fVar890;
          auVar1013._28_4_ = fVar890;
          fVar890 = *ptr1;
          fVar891 = ptr1[1];
          auVar716 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar1013,1);
          auVar716 = vsubps_avx512f(auVar716,auVar734);
          *(undefined1 (*) [64])outptr = auVar716;
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 4;
        } while (iVar424 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffc;
      }
      auVar442 = auVar734._0_16_;
      if ((int)(uVar427 | 1) < (int)uVar425) {
        auVar1014._16_16_ = auVar442;
        auVar1014._0_16_ = auVar442;
        uVar882 = uVar427;
        do {
          fVar890 = *ptr1;
          auVar1075._4_4_ = fVar890;
          auVar1075._0_4_ = fVar890;
          auVar1075._8_4_ = fVar890;
          auVar1075._12_4_ = fVar890;
          fVar890 = ptr1[1];
          auVar1075._20_4_ = fVar890;
          auVar1075._16_4_ = fVar890;
          auVar1075._24_4_ = fVar890;
          auVar1075._28_4_ = fVar890;
          auVar674 = vsubps_avx(auVar1075,auVar1014);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar427 = uVar882 + 2;
          iVar424 = uVar882 + 3;
          uVar882 = uVar427;
        } while (iVar424 < (int)uVar425);
      }
      if ((int)uVar425 <= (int)uVar427) {
        return;
      }
      lVar428 = 0;
      do {
        fVar890 = ptr1[lVar428];
        auVar976._4_4_ = fVar890;
        auVar976._0_4_ = fVar890;
        auVar976._8_4_ = fVar890;
        auVar976._12_4_ = fVar890;
        auVar460 = vsubps_avx(auVar976,auVar442);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar460;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        lVar428 = lVar428 + 1;
      } while (uVar425 - uVar427 != (int)lVar428);
      return;
    }
    uVar427 = uVar425;
    if (0 < (int)uVar425 && iVar424 == 0x10) {
      do {
        auVar734 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        auVar734 = vsubps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [64])outptr = auVar734;
        ptr = (float *)((long)ptr + 0x40);
        ptr1 = ptr1 + 1;
        outptr = (float *)((long)outptr + 0x40);
        uVar427 = uVar427 - 1;
      } while (uVar427 != 0);
    }
    if (iVar424 == 8) {
      uVar427 = 0;
      if (1 < (int)uVar425) {
        iVar426 = 1;
        do {
          fVar890 = *ptr1;
          fVar891 = ptr1[1];
          auVar994._4_4_ = fVar891;
          auVar994._0_4_ = fVar891;
          auVar994._8_4_ = fVar891;
          auVar994._12_4_ = fVar891;
          auVar994._16_4_ = fVar891;
          auVar994._20_4_ = fVar891;
          auVar994._24_4_ = fVar891;
          auVar994._28_4_ = fVar891;
          auVar734 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar994,
                                1);
          auVar734 = vsubps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar734;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
          iVar426 = iVar426 + 2;
        } while (iVar426 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffe;
      }
      iVar426 = uVar425 - uVar427;
      if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
        do {
          fVar890 = *ptr1;
          auVar917._4_4_ = fVar890;
          auVar917._0_4_ = fVar890;
          auVar917._8_4_ = fVar890;
          auVar917._12_4_ = fVar890;
          auVar917._16_4_ = fVar890;
          auVar917._20_4_ = fVar890;
          auVar917._24_4_ = fVar890;
          auVar917._28_4_ = fVar890;
          auVar674 = vsubps_avx(auVar917,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          iVar426 = iVar426 + -1;
        } while (iVar426 != 0);
      }
    }
    if (iVar424 != 4) {
      return;
    }
    uVar427 = 0;
    if (3 < (int)uVar425) {
      iVar424 = 3;
      do {
        fVar890 = ptr1[2];
        auVar918._4_4_ = fVar890;
        auVar918._0_4_ = fVar890;
        auVar918._8_4_ = fVar890;
        auVar918._12_4_ = fVar890;
        fVar890 = ptr1[3];
        auVar918._20_4_ = fVar890;
        auVar918._16_4_ = fVar890;
        auVar918._24_4_ = fVar890;
        auVar918._28_4_ = fVar890;
        fVar890 = *ptr1;
        fVar891 = ptr1[1];
        auVar734 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar918,1);
        auVar734 = vsubps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [64])outptr = auVar734;
        ptr = (float *)((long)ptr + 0x40);
        ptr1 = ptr1 + 4;
        outptr = (float *)((long)outptr + 0x40);
        iVar424 = iVar424 + 4;
      } while (iVar424 < (int)uVar425);
      uVar427 = uVar425 & 0x7ffffffc;
    }
    uVar882 = uVar427 | 1;
    while ((int)uVar882 < (int)uVar425) {
      fVar890 = *ptr1;
      auVar919._4_4_ = fVar890;
      auVar919._0_4_ = fVar890;
      auVar919._8_4_ = fVar890;
      auVar919._12_4_ = fVar890;
      fVar890 = ptr1[1];
      auVar919._20_4_ = fVar890;
      auVar919._16_4_ = fVar890;
      auVar919._24_4_ = fVar890;
      auVar919._28_4_ = fVar890;
      auVar674 = vsubps_avx(auVar919,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
      *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
      ptr1 = ptr1 + 2;
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      uVar882 = uVar427 + 3;
      uVar427 = uVar427 + 2;
    }
    iVar424 = uVar425 - uVar427;
    if (iVar424 == 0 || (int)uVar425 < (int)uVar427) {
      ::_ps512_1[0] = ::_ps512_1[0];
      ::_ps512_1[1] = ::_ps512_1[1];
      ::_ps512_1[2] = ::_ps512_1[2];
      ::_ps512_1[3] = ::_ps512_1[3];
      ::_ps512_1[4] = ::_ps512_1[4];
      ::_ps512_1[5] = ::_ps512_1[5];
      ::_ps512_1[6] = ::_ps512_1[6];
      ::_ps512_1[7] = ::_ps512_1[7];
      ::_ps512_1[8] = ::_ps512_1[8];
      ::_ps512_1[9] = ::_ps512_1[9];
      ::_ps512_1[10] = ::_ps512_1[10];
      ::_ps512_1[0xb] = ::_ps512_1[0xb];
      ::_ps512_1[0xc] = ::_ps512_1[0xc];
      ::_ps512_1[0xd] = ::_ps512_1[0xd];
      ::_ps512_1[0xe] = ::_ps512_1[0xe];
      ::_ps512_1[0xf] = ::_ps512_1[0xf];
      ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
      ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
      ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
      ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
      ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
      ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
      ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
      ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
      ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
      ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
      ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
      ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
      ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
      ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
      ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
      ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
      ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
      ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
      ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
      ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
      ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
      ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
      ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
      ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
      ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
      ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
      ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
      ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
      ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
      ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
      ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
      ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
      ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
      ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
      ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
      ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
      ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
      ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
      ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
      ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
      ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
      ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
      ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
      ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
      ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
      ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
      ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
      ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
      ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
      ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
      ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
      ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
      ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
      ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
      ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
      ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
      ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
      ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
      ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
      ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
      ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
      ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
      ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
      ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
      ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
      ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
      ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
      ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
      ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
      ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
      ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
      ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
      ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
      ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
      ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
      ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
      ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
      ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
      ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
      ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
      ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
      ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
      ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
      ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
      ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
      ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
      ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
      ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
      ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
      ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
      ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
      ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
      ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
      ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
      ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
      ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
      ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
      ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
      ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
      ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
      ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
      ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
      ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
      ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
      ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
      ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
      ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
      ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
      ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
      ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
      ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
      ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
      ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
      ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
      ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
      ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
      ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
      ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
      ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
      ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
      ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
      ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
      ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
      ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
      ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
      ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
      ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
      ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
      ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
      ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
      ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
      ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
      ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
      ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
      ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
      ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
      ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
      ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
      ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
      ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
      ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
      ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
      ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
      ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
      ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
      ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
      ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
      ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
      ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
      ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
      ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
      ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
      ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
      ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
      ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
      ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
      ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
      ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
      ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
      ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
      _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
      _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
      _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
      _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
      _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
      _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
      _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
      _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
      _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
      _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
      _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
      _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
      _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
      _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
      _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
      _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
      _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
      _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
      _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
      _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
      _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
      _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
      _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
      _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
      _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
      _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
      _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
      _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
      _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
      _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
      _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
      _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
      _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
      _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
      _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
      _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
      _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
      _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
      _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
      _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
      _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
      _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
      _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
      _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
      _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
      _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
      _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
      _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
      _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
      _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
      _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
      _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
      _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
      _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
      _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
      _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
      _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
      _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
      _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
      _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
      _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
      _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
      _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
      _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
      _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
      _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
      _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
      _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
      _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
      _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
      _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
      _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
      _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
      _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
      _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
      _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
      _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
      _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
      _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
      _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
      _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
      _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
      _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
      _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
      _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
      _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
      _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
      _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
      _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
      _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
      _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
      _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
      _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
      _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
      _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
      _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
      _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
      _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
      _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
      _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
      _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
      _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
      _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
      _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
      _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
      _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
      _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
      _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
      _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
      _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
      _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
      _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
      _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
      _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
      _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
      _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
      _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
      _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
      _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
      _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
      _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
      _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
      _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
      _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
      _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
      _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
      _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
      _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
      _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
      _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
      _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
      _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
      _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
      _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
      _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
      _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
      _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
      _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
      _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
      _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
      _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
      _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
      _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
      _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
      _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
      _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
      _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
      _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
      _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
      _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
      _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
      _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
      _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
      _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
      _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
      _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
      _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
      _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
      _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
      _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
      _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
      _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
      _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
      _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
      _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
      _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
      _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
      _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
      _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
      _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
      _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
      _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
      _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
      _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
      _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
      _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
      _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
      _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
      _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
      _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
      _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
      _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
      _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
      _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
      _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
      _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
      _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
      _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
      _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
      _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
      _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
      _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
      _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
      _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
      _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
      _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
      _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
      _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
      _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
      _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
      _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
      _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
      _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
      _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
      _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
      _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
      _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
      _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
      _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
      _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
      _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
      _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
      _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
      _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
      _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
      _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
      _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
      _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
      _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
      _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
      _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
      _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
      _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
      _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
      return;
    }
    lVar428 = 0;
    do {
      uVar11 = *(undefined4 *)((long)ptr1 + lVar428);
      auVar898._4_4_ = uVar11;
      auVar898._0_4_ = uVar11;
      auVar898._8_4_ = uVar11;
      auVar898._12_4_ = uVar11;
      auVar442 = vsubps_avx(auVar898,*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar428 * 4)
                           );
      *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar442;
      lVar428 = lVar428 + 4;
      iVar424 = iVar424 + -1;
    } while (iVar424 != 0);
    return;
  case 8:
    uVar425 = bw;
    if (bw < aw) {
      uVar425 = aw;
    }
    iVar424 = bp;
    if (bp < ap) {
      iVar424 = ap;
    }
    uVar427 = iVar424 * uVar425;
    if (ap == bp) {
      if (aw == bw) {
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar734 = vdivps_avx512f(*(undefined1 (*) [64])ptr1,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar734;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar674 = vdivps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1,
                                *(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          auVar442 = vdivps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1,
                                *(undefined1 (*) [16])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               *(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4) /
               *(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (bw == 1) {
        fVar890 = *ptr1;
        if (iVar424 == 4) {
          auVar954 = *(undefined1 (*) [16])ptr1;
        }
        else {
          auVar954._4_4_ = fVar890;
          auVar954._0_4_ = fVar890;
          auVar954._8_4_ = fVar890;
          auVar954._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1094 = *(undefined1 (*) [32])ptr1;
        }
        else {
          auVar1094._16_16_ = auVar954;
          auVar1094._0_16_ = auVar954;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr1;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1094),auVar1094,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          do {
            auVar716 = vdivps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        uVar882 = uVar425 | 7;
        while ((int)uVar882 < (int)uVar427) {
          auVar674 = vdivps_avx(auVar1094,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar882 = uVar425 + 0xf;
          uVar425 = uVar425 + 8;
        }
        uVar882 = uVar425 | 3;
        while ((int)uVar882 < (int)uVar427) {
          auVar442 = vdivps_avx(auVar954,*(undefined1 (*) [16])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar882 = uVar425 + 7;
          uVar425 = uVar425 + 4;
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               fVar890 / *(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (aw == 1) {
        fVar890 = *ptr;
        if (iVar424 == 4) {
          auVar974 = *(undefined1 (*) [16])ptr;
        }
        else {
          auVar974._4_4_ = fVar890;
          auVar974._0_4_ = fVar890;
          auVar974._8_4_ = fVar890;
          auVar974._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1106 = *(undefined1 (*) [32])ptr;
        }
        else {
          auVar1106._16_16_ = auVar974;
          auVar1106._0_16_ = auVar974;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1106),auVar1106,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          auVar716 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar734 = vdivps_avx512f(auVar716,auVar734);
          iVar424 = 0xf;
          do {
            auVar716 = vmulps_avx512f(auVar734,*(undefined1 (*) [64])ptr1);
            *(undefined1 (*) [64])outptr = auVar716;
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        if ((int)(uVar425 | 7) < (int)uVar427) {
          auVar1157._8_4_ = 0x3f800000;
          auVar1157._0_8_ = 0x3f8000003f800000;
          auVar1157._12_4_ = 0x3f800000;
          auVar1157._16_4_ = 0x3f800000;
          auVar1157._20_4_ = 0x3f800000;
          auVar1157._24_4_ = 0x3f800000;
          auVar1157._28_4_ = 0x3f800000;
          auVar674 = vdivps_avx(auVar1157,auVar1106);
          uVar882 = uVar425;
          do {
            auVar396._4_4_ = auVar674._4_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 4);
            auVar396._0_4_ = auVar674._0_4_ * *(float *)*(undefined1 (*) [64])ptr1;
            auVar396._8_4_ = auVar674._8_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 8);
            auVar396._12_4_ = auVar674._12_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
            auVar396._16_4_ = auVar674._16_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 0x10);
            auVar396._20_4_ = auVar674._20_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 0x14);
            auVar396._24_4_ = auVar674._24_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 0x18);
            auVar396._28_4_ = auVar1157._28_4_;
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar396;
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
            auVar1157 = auVar396;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)(uVar425 | 3) < (int)uVar427) {
          auVar1050._8_4_ = 0x3f800000;
          auVar1050._0_8_ = 0x3f8000003f800000;
          auVar1050._12_4_ = 0x3f800000;
          auVar442 = vdivps_avx(auVar1050,auVar974);
          uVar882 = uVar425;
          do {
            fVar891 = *(float *)(*(undefined1 (*) [64])ptr1 + 4);
            fVar397 = *(float *)(*(undefined1 (*) [64])ptr1 + 8);
            fVar936 = *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
            *(float *)*(undefined1 (*) [64])outptr =
                 auVar442._0_4_ * *(float *)*(undefined1 (*) [64])ptr1;
            *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar442._4_4_ * fVar891;
            *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar442._8_4_ * fVar397;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar442._12_4_ * fVar936;
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
            uVar425 = uVar882 + 4;
            iVar424 = uVar882 + 7;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          return;
        }
        lVar428 = 0;
        do {
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) =
               (1.0 / fVar890) * *(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4);
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
    }
    if (bp != 1) {
      return;
    }
    if (aw == bw) {
      uVar427 = uVar425;
      if (0 < (int)uVar425 && iVar424 == 0x10) {
        do {
          auVar734 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          auVar734 = vdivps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar734;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar427 = uVar427 - 1;
        } while (uVar427 != 0);
      }
      if (iVar424 == 8) {
        uVar427 = 0;
        if (1 < (int)uVar425) {
          iVar426 = 1;
          do {
            fVar890 = *ptr1;
            fVar891 = ptr1[1];
            auVar1004._4_4_ = fVar891;
            auVar1004._0_4_ = fVar891;
            auVar1004._8_4_ = fVar891;
            auVar1004._12_4_ = fVar891;
            auVar1004._16_4_ = fVar891;
            auVar1004._20_4_ = fVar891;
            auVar1004._24_4_ = fVar891;
            auVar1004._28_4_ = fVar891;
            auVar734 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar1004
                                  ,1);
            auVar734 = vdivps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
            ptr = (float *)((long)ptr + 0x40);
            *(undefined1 (*) [64])outptr = auVar734;
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar426 = iVar426 + 2;
          } while (iVar426 < (int)uVar425);
          uVar427 = uVar425 & 0x7ffffffe;
        }
        iVar426 = uVar425 - uVar427;
        if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
          do {
            fVar890 = *ptr1;
            auVar928._4_4_ = fVar890;
            auVar928._0_4_ = fVar890;
            auVar928._8_4_ = fVar890;
            auVar928._12_4_ = fVar890;
            auVar928._16_4_ = fVar890;
            auVar928._20_4_ = fVar890;
            auVar928._24_4_ = fVar890;
            auVar928._28_4_ = fVar890;
            auVar674 = vdivps_avx(auVar928,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar426 = iVar426 + -1;
          } while (iVar426 != 0);
        }
      }
      if (iVar424 != 4) {
        return;
      }
      uVar427 = 0;
      if (3 < (int)uVar425) {
        iVar424 = 3;
        do {
          fVar890 = ptr1[2];
          auVar929._4_4_ = fVar890;
          auVar929._0_4_ = fVar890;
          auVar929._8_4_ = fVar890;
          auVar929._12_4_ = fVar890;
          fVar890 = ptr1[3];
          auVar929._20_4_ = fVar890;
          auVar929._16_4_ = fVar890;
          auVar929._24_4_ = fVar890;
          auVar929._28_4_ = fVar890;
          fVar890 = *ptr1;
          fVar891 = ptr1[1];
          auVar734 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar929,1);
          auVar734 = vdivps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
          ptr = (float *)((long)ptr + 0x40);
          *(undefined1 (*) [64])outptr = auVar734;
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 4;
        } while (iVar424 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffc;
      }
      uVar882 = uVar427 | 1;
      while ((int)uVar882 < (int)uVar425) {
        fVar890 = *ptr1;
        auVar930._4_4_ = fVar890;
        auVar930._0_4_ = fVar890;
        auVar930._8_4_ = fVar890;
        auVar930._12_4_ = fVar890;
        fVar890 = ptr1[1];
        auVar930._20_4_ = fVar890;
        auVar930._16_4_ = fVar890;
        auVar930._24_4_ = fVar890;
        auVar930._28_4_ = fVar890;
        auVar674 = vdivps_avx(auVar930,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar882 = uVar427 + 3;
        uVar427 = uVar427 + 2;
      }
      iVar424 = uVar425 - uVar427;
      if (iVar424 == 0 || (int)uVar425 < (int)uVar427) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar428 = 0;
      do {
        uVar11 = *(undefined4 *)((long)ptr1 + lVar428);
        auVar904._4_4_ = uVar11;
        auVar904._0_4_ = uVar11;
        auVar904._8_4_ = uVar11;
        auVar904._12_4_ = uVar11;
        auVar442 = vdivps_avx(auVar904,*(undefined1 (*) [16])
                                        (*(undefined1 (*) [64])ptr + lVar428 * 4));
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar442;
        lVar428 = lVar428 + 4;
        iVar424 = iVar424 + -1;
      } while (iVar424 != 0);
      return;
    }
    if (bw == 1) {
      uVar425 = 0;
      if (0xf < (int)uVar427) {
        auVar734 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        iVar424 = 0xf;
        do {
          auVar716 = vdivps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar716;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 0x10;
        } while (iVar424 < (int)uVar427);
        uVar425 = uVar427 & 0x7ffffff0;
      }
      if ((int)(uVar425 | 7) < (int)uVar427) {
        fVar890 = *ptr1;
        auVar931._4_4_ = fVar890;
        auVar931._0_4_ = fVar890;
        auVar931._8_4_ = fVar890;
        auVar931._12_4_ = fVar890;
        auVar931._16_4_ = fVar890;
        auVar931._20_4_ = fVar890;
        auVar931._24_4_ = fVar890;
        auVar931._28_4_ = fVar890;
        uVar882 = uVar425;
        do {
          auVar674 = vdivps_avx(auVar931,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar674;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar425 = uVar882 + 8;
          iVar424 = uVar882 + 0xf;
          uVar882 = uVar425;
        } while (iVar424 < (int)uVar427);
      }
      if ((int)uVar427 <= (int)(uVar425 | 3)) {
        return;
      }
      fVar890 = *ptr1;
      auVar905._4_4_ = fVar890;
      auVar905._0_4_ = fVar890;
      auVar905._8_4_ = fVar890;
      auVar905._12_4_ = fVar890;
      lVar428 = 0;
      do {
        auVar442 = vdivps_avx(auVar905,*(undefined1 (*) [16])
                                        (*(undefined1 (*) [64])ptr + lVar428 * 4));
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar442;
        lVar428 = lVar428 + 4;
      } while ((int)(uVar425 + 3 + (int)lVar428) < (int)uVar427);
      return;
    }
    if (aw != 1) {
      return;
    }
    if (iVar424 == 0x10) {
      auVar734 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar734 = vdivps_avx512f(auVar734,*(undefined1 (*) [64])ptr);
      uVar427 = uVar425;
      do {
        fVar890 = *ptr1;
        auVar358._4_4_ = fVar890;
        auVar358._0_4_ = fVar890;
        auVar358._8_4_ = fVar890;
        auVar358._12_4_ = fVar890;
        auVar358._16_4_ = fVar890;
        auVar358._20_4_ = fVar890;
        auVar358._24_4_ = fVar890;
        auVar358._28_4_ = fVar890;
        auVar358._32_4_ = fVar890;
        auVar358._36_4_ = fVar890;
        auVar358._40_4_ = fVar890;
        auVar358._44_4_ = fVar890;
        auVar358._48_4_ = fVar890;
        auVar358._52_4_ = fVar890;
        auVar358._56_4_ = fVar890;
        auVar358._60_4_ = fVar890;
        auVar716 = vmulps_avx512f(auVar734,auVar358);
        *(undefined1 (*) [64])outptr = auVar716;
        ptr1 = ptr1 + 1;
        outptr = (float *)((long)outptr + 0x40);
        uVar427 = uVar427 - 1;
      } while (uVar427 != 0);
    }
    if (iVar424 == 8) {
      auVar674 = *(undefined1 (*) [32])ptr;
      uVar427 = 0;
      if (1 < (int)uVar425) {
        auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar674),auVar674,1);
        auVar716 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar734 = vdivps_avx512f(auVar716,auVar734);
        iVar426 = 1;
        do {
          fVar890 = *ptr1;
          fVar891 = ptr1[1];
          auVar1149._4_4_ = fVar891;
          auVar1149._0_4_ = fVar891;
          auVar1149._8_4_ = fVar891;
          auVar1149._12_4_ = fVar891;
          auVar1149._16_4_ = fVar891;
          auVar1149._20_4_ = fVar891;
          auVar1149._24_4_ = fVar891;
          auVar1149._28_4_ = fVar891;
          auVar716 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT428(fVar890,CONCAT424(fVar890,CONCAT420(fVar890,
                                                  CONCAT416(fVar890,CONCAT412(fVar890,CONCAT48(
                                                  fVar890,CONCAT44(fVar890,fVar890)))))))),auVar1149
                                ,1);
          auVar716 = vmulps_avx512f(auVar716,auVar734);
          *(undefined1 (*) [64])outptr = auVar716;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
          iVar426 = iVar426 + 2;
        } while (iVar426 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffe;
      }
      iVar426 = uVar425 - uVar427;
      if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
        auVar1023._8_4_ = 0x3f800000;
        auVar1023._0_8_ = 0x3f8000003f800000;
        auVar1023._12_4_ = 0x3f800000;
        auVar1023._16_4_ = 0x3f800000;
        auVar1023._20_4_ = 0x3f800000;
        auVar1023._24_4_ = 0x3f800000;
        auVar1023._28_4_ = 0x3f800000;
        auVar674 = vdivps_avx(auVar1023,auVar674);
        do {
          fVar890 = *ptr1;
          auVar253._4_4_ = fVar890;
          auVar253._0_4_ = fVar890;
          auVar253._8_4_ = fVar890;
          auVar253._12_4_ = fVar890;
          auVar253._16_4_ = fVar890;
          auVar253._20_4_ = fVar890;
          auVar253._24_4_ = fVar890;
          auVar253._28_4_ = fVar890;
          auVar677 = vmulps_avx512vl(auVar674,auVar253);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar677;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          iVar426 = iVar426 + -1;
        } while (iVar426 != 0);
      }
    }
    if (iVar424 != 4) {
      return;
    }
    auVar442 = *(undefined1 (*) [16])ptr;
    auVar934._16_16_ = auVar442;
    auVar934._0_16_ = auVar442;
    uVar427 = 0;
    if (3 < (int)uVar425) {
      auVar734 = vinserti64x4_avx512f(ZEXT3264(auVar934),auVar934,1);
      auVar716 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar734 = vdivps_avx512f(auVar716,auVar734);
      iVar424 = 3;
      do {
        fVar890 = ptr1[2];
        auVar1082._4_4_ = fVar890;
        auVar1082._0_4_ = fVar890;
        auVar1082._8_4_ = fVar890;
        auVar1082._12_4_ = fVar890;
        fVar890 = ptr1[3];
        auVar1082._20_4_ = fVar890;
        auVar1082._16_4_ = fVar890;
        auVar1082._24_4_ = fVar890;
        auVar1082._28_4_ = fVar890;
        fVar890 = *ptr1;
        fVar891 = ptr1[1];
        auVar716 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar1082,1);
        auVar716 = vmulps_avx512f(auVar716,auVar734);
        *(undefined1 (*) [64])outptr = auVar716;
        ptr1 = ptr1 + 4;
        outptr = (float *)((long)outptr + 0x40);
        iVar424 = iVar424 + 4;
      } while (iVar424 < (int)uVar425);
      uVar427 = uVar425 & 0x7ffffffc;
    }
    if ((int)(uVar427 | 1) < (int)uVar425) {
      auVar1024._8_4_ = 0x3f800000;
      auVar1024._0_8_ = 0x3f8000003f800000;
      auVar1024._12_4_ = 0x3f800000;
      auVar1024._16_4_ = 0x3f800000;
      auVar1024._20_4_ = 0x3f800000;
      auVar1024._24_4_ = 0x3f800000;
      auVar1024._28_4_ = 0x3f800000;
      auVar674 = vdivps_avx(auVar1024,auVar934);
      uVar882 = uVar427;
      do {
        fVar890 = *ptr1;
        fVar891 = ptr1[1];
        *(float *)*(undefined1 (*) [64])outptr = fVar890 * auVar674._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar890 * auVar674._4_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar890 * auVar674._8_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar890 * auVar674._12_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar891 * auVar674._16_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar891 * auVar674._20_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar891 * auVar674._24_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar891;
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar427 = uVar882 + 2;
        iVar424 = uVar882 + 3;
        uVar882 = uVar427;
      } while (iVar424 < (int)uVar425);
    }
    if ((int)uVar425 <= (int)uVar427) {
      return;
    }
    auVar978._8_4_ = 0x3f800000;
    auVar978._0_8_ = 0x3f8000003f800000;
    auVar978._12_4_ = 0x3f800000;
    auVar442 = vdivps_avx(auVar978,auVar442);
    lVar428 = 0;
    do {
      fVar890 = ptr1[lVar428];
      auVar115._4_4_ = fVar890;
      auVar115._0_4_ = fVar890;
      auVar115._8_4_ = fVar890;
      auVar115._12_4_ = fVar890;
      auVar460 = vmulps_avx512vl(auVar442,auVar115);
      *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar460;
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      lVar428 = lVar428 + 1;
    } while (uVar425 - uVar427 != (int)lVar428);
    return;
  case 9:
    uVar425 = bw;
    if (bw < aw) {
      uVar425 = aw;
    }
    iVar424 = bp;
    if (bp < ap) {
      iVar424 = ap;
    }
    uVar427 = iVar424 * uVar425;
    if (ap == bp) {
      if (aw == bw) {
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          in_ZMM3 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar734 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar716 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar717 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
          auVar718 = vpxord_avx512f(in_ZMM3,auVar716);
          auVar719 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
          auVar720 = vpxord_avx512f(auVar719,auVar716);
          auVar716 = vpxord_avx512f(auVar717,auVar716);
          iVar424 = 0xf;
          auVar442 = vxorps_avx512vl(auVar472,auVar472);
          auVar721 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
          do {
            auVar722 = vmaxps_avx512f(*(undefined1 (*) [64])ptr1,
                                      (undefined1  [64])_ps512_min_norm_pos);
            auVar723 = vpsrld_avx512f(auVar722,0x17);
            auVar722 = vpternlogd_avx512f(auVar722,in_ZMM3,(undefined1  [64])_ps512_inv_mant_mask,
                                          0xec);
            uVar47 = vcmpps_avx512f(auVar722,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar724 = vsubps_avx512f(auVar722,(undefined1  [64])afVar407);
            auVar722 = vaddps_avx512f(auVar724,auVar722);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar738._0_4_ = (uint)bVar12 * auVar722._0_4_ | (uint)!bVar12 * auVar724._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar738._4_4_ = (uint)bVar12 * auVar722._4_4_ | (uint)!bVar12 * auVar724._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar738._8_4_ = (uint)bVar12 * auVar722._8_4_ | (uint)!bVar12 * auVar724._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar738._12_4_ = (uint)bVar12 * auVar722._12_4_ | (uint)!bVar12 * auVar724._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar738._16_4_ = (uint)bVar12 * auVar722._16_4_ | (uint)!bVar12 * auVar724._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar738._20_4_ = (uint)bVar12 * auVar722._20_4_ | (uint)!bVar12 * auVar724._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar738._24_4_ = (uint)bVar12 * auVar722._24_4_ | (uint)!bVar12 * auVar724._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar738._28_4_ = (uint)bVar12 * auVar722._28_4_ | (uint)!bVar12 * auVar724._28_4_;
            bVar29 = (byte)(uVar47 >> 8);
            bVar12 = (bool)(bVar29 & 1);
            auVar738._32_4_ = (uint)bVar12 * auVar722._32_4_ | (uint)!bVar12 * auVar724._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar738._36_4_ = (uint)bVar12 * auVar722._36_4_ | (uint)!bVar12 * auVar724._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar738._40_4_ = (uint)bVar12 * auVar722._40_4_ | (uint)!bVar12 * auVar724._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar738._44_4_ = (uint)bVar12 * auVar722._44_4_ | (uint)!bVar12 * auVar724._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar738._48_4_ = (uint)bVar12 * auVar722._48_4_ | (uint)!bVar12 * auVar724._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar738._52_4_ = (uint)bVar12 * auVar722._52_4_ | (uint)!bVar12 * auVar724._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar738._56_4_ = (uint)bVar12 * auVar722._56_4_ | (uint)!bVar12 * auVar724._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar738._60_4_ = (uint)bVar12 * auVar722._60_4_ | (uint)!bVar12 * auVar724._60_4_;
            auVar722 = vfmadd132ps_avx512f(auVar738,(undefined1  [64])afVar416,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar738,(undefined1  [64])afVar417);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar738,(undefined1  [64])afVar418);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar738,(undefined1  [64])afVar419);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar738,(undefined1  [64])afVar420);
            auVar724 = vmulps_avx512f(auVar738,auVar738);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar738,(undefined1  [64])afVar421);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar738,(undefined1  [64])afVar422);
            auVar725 = vmulps_avx512f(auVar724,auVar738);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar738,(undefined1  [64])afVar423);
            auVar722 = vfmadd213ps_avx512f(auVar725,auVar722,auVar738);
            auVar723 = vpsubd_avx512f(auVar723,auVar734);
            auVar723 = vcvtdq2ps_avx512f(auVar723);
            auVar725 = vaddps_avx512f(auVar723,(undefined1  [64])afVar407);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar739._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar725._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar739._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar725._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar739._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar725._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar739._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar725._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar739._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar725._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar739._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar725._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar739._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar725._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar739._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar725._28_4_;
            bVar12 = (bool)(bVar29 & 1);
            auVar739._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar725._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar739._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar725._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar739._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar725._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar739._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar725._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar739._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar725._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar739._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar725._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar739._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar725._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar739._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar725._60_4_;
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar739,auVar717);
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar718,auVar724);
            uVar47 = vcmpps_avx512f(*(undefined1 (*) [64])ptr1,ZEXT1664(auVar442),2);
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar719,auVar739);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar740._0_4_ = (uint)bVar12 * auVar721._0_4_ | (uint)!bVar12 * auVar722._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar740._4_4_ = (uint)bVar12 * auVar721._4_4_ | (uint)!bVar12 * auVar722._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar740._8_4_ = (uint)bVar12 * auVar721._8_4_ | (uint)!bVar12 * auVar722._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar740._12_4_ = (uint)bVar12 * auVar721._12_4_ | (uint)!bVar12 * auVar722._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar740._16_4_ = (uint)bVar12 * auVar721._16_4_ | (uint)!bVar12 * auVar722._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar740._20_4_ = (uint)bVar12 * auVar721._20_4_ | (uint)!bVar12 * auVar722._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar740._24_4_ = (uint)bVar12 * auVar721._24_4_ | (uint)!bVar12 * auVar722._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar740._28_4_ = (uint)bVar12 * auVar721._28_4_ | (uint)!bVar12 * auVar722._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            auVar740._32_4_ = (uint)bVar12 * auVar721._32_4_ | (uint)!bVar12 * auVar722._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar740._36_4_ = (uint)bVar12 * auVar721._36_4_ | (uint)!bVar12 * auVar722._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar740._40_4_ = (uint)bVar12 * auVar721._40_4_ | (uint)!bVar12 * auVar722._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar740._44_4_ = (uint)bVar12 * auVar721._44_4_ | (uint)!bVar12 * auVar722._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar740._48_4_ = (uint)bVar12 * auVar721._48_4_ | (uint)!bVar12 * auVar722._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar740._52_4_ = (uint)bVar12 * auVar721._52_4_ | (uint)!bVar12 * auVar722._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar740._56_4_ = (uint)bVar12 * auVar721._56_4_ | (uint)!bVar12 * auVar722._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar740._60_4_ = (uint)bVar12 * auVar721._60_4_ | (uint)!bVar12 * auVar722._60_4_;
            auVar722 = vmulps_avx512f(auVar740,*(undefined1 (*) [64])ptr);
            auVar722 = vminps_avx512f(auVar722,(undefined1  [64])afVar408);
            auVar722 = vmaxps_avx512f(auVar722,(undefined1  [64])afVar409);
            auVar723 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar722,in_ZMM3);
            auVar724 = vrndscaleps_avx512f(auVar723,1);
            uVar47 = vcmpps_avx512f(auVar723,auVar724,1);
            auVar723 = vsubps_avx512f(auVar724,(undefined1  [64])afVar407);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar741._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar724._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar741._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar724._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar741._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar724._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar741._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar724._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar741._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar724._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar741._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar724._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar741._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar724._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar741._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar724._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            auVar741._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar724._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar741._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar724._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar741._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar724._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar741._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar724._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar741._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar724._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar741._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar724._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar741._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar724._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar741._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar724._60_4_;
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar741,auVar720);
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar741,auVar716);
            auVar723 = vfmadd213ps_avx512f(auVar722,(undefined1  [64])afVar411,
                                           (undefined1  [64])afVar412);
            auVar724 = vmulps_avx512f(auVar722,auVar722);
            auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar413);
            auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar414);
            auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar415);
            auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,in_ZMM3);
            auVar722 = vfmadd213ps_avx512f(auVar723,auVar724,auVar722);
            auVar722 = vaddps_avx512f(auVar722,(undefined1  [64])afVar407);
            auVar723 = vcvttps2dq_avx512f(auVar741);
            auVar723 = vpaddd_avx512f(auVar723,auVar734);
            in_ZMM2 = vpslld_avx512f(auVar723,0x17);
            auVar722 = vmulps_avx512f(auVar722,in_ZMM2);
            *(undefined1 (*) [64])outptr = auVar722;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
          auVar442 = auVar519;
          auVar674 = auVar678;
        }
        auVar460 = auVar674._0_16_;
        if ((int)(uVar425 | 7) < (int)uVar427) {
          auVar1191._8_4_ = 0x3f3504f3;
          auVar1191._0_8_ = 0x3f3504f33f3504f3;
          auVar1191._12_4_ = 0x3f3504f3;
          auVar1191._16_4_ = 0x3f3504f3;
          auVar1191._20_4_ = 0x3f3504f3;
          auVar1191._24_4_ = 0x3f3504f3;
          auVar1191._28_4_ = 0x3f3504f3;
          auVar1246._8_4_ = 0xbf800000;
          auVar1246._0_8_ = 0xbf800000bf800000;
          auVar1246._12_4_ = 0xbf800000;
          auVar1246._16_4_ = 0xbf800000;
          auVar1246._20_4_ = 0xbf800000;
          auVar1246._24_4_ = 0xbf800000;
          auVar1246._28_4_ = 0xbf800000;
          auVar1308._8_4_ = 0x3f800000;
          auVar1308._0_8_ = 0x3f8000003f800000;
          auVar1308._12_4_ = 0x3f800000;
          auVar1308._16_4_ = 0x3f800000;
          auVar1308._20_4_ = 0x3f800000;
          auVar1308._24_4_ = 0x3f800000;
          auVar1308._28_4_ = 0x3f800000;
          auVar1367._8_4_ = 0x3d9021bb;
          auVar1367._0_8_ = 0x3d9021bb3d9021bb;
          auVar1367._12_4_ = 0x3d9021bb;
          auVar1367._16_4_ = 0x3d9021bb;
          auVar1367._20_4_ = 0x3d9021bb;
          auVar1367._24_4_ = 0x3d9021bb;
          auVar1367._28_4_ = 0x3d9021bb;
          auVar1423._8_4_ = 0xbdebd1b8;
          auVar1423._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar1423._12_4_ = 0xbdebd1b8;
          auVar1423._16_4_ = 0xbdebd1b8;
          auVar1423._20_4_ = 0xbdebd1b8;
          auVar1423._24_4_ = 0xbdebd1b8;
          auVar1423._28_4_ = 0xbdebd1b8;
          auVar1477._8_4_ = 0x3def251a;
          auVar1477._0_8_ = 0x3def251a3def251a;
          auVar1477._12_4_ = 0x3def251a;
          auVar1477._16_4_ = 0x3def251a;
          auVar1477._20_4_ = 0x3def251a;
          auVar1477._24_4_ = 0x3def251a;
          auVar1477._28_4_ = 0x3def251a;
          auVar1531._8_4_ = 0xbdfe5d4f;
          auVar1531._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar1531._12_4_ = 0xbdfe5d4f;
          auVar1531._16_4_ = 0xbdfe5d4f;
          auVar1531._20_4_ = 0xbdfe5d4f;
          auVar1531._24_4_ = 0xbdfe5d4f;
          auVar1531._28_4_ = 0xbdfe5d4f;
          auVar1585._8_4_ = 0x3e11e9bf;
          auVar1585._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar1585._12_4_ = 0x3e11e9bf;
          auVar1585._16_4_ = 0x3e11e9bf;
          auVar1585._20_4_ = 0x3e11e9bf;
          auVar1585._24_4_ = 0x3e11e9bf;
          auVar1585._28_4_ = 0x3e11e9bf;
          auVar1639._8_4_ = 0xbe2aae50;
          auVar1639._0_8_ = 0xbe2aae50be2aae50;
          auVar1639._12_4_ = 0xbe2aae50;
          auVar1639._16_4_ = 0xbe2aae50;
          auVar1639._20_4_ = 0xbe2aae50;
          auVar1639._24_4_ = 0xbe2aae50;
          auVar1639._28_4_ = 0xbe2aae50;
          auVar1693._8_4_ = 0x3e4cceac;
          auVar1693._0_8_ = 0x3e4cceac3e4cceac;
          auVar1693._12_4_ = 0x3e4cceac;
          auVar1693._16_4_ = 0x3e4cceac;
          auVar1693._20_4_ = 0x3e4cceac;
          auVar1693._24_4_ = 0x3e4cceac;
          auVar1693._28_4_ = 0x3e4cceac;
          auVar1746._8_4_ = 0xbe7ffffc;
          auVar1746._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar1746._12_4_ = 0xbe7ffffc;
          auVar1746._16_4_ = 0xbe7ffffc;
          auVar1746._20_4_ = 0xbe7ffffc;
          auVar1746._24_4_ = 0xbe7ffffc;
          auVar1746._28_4_ = 0xbe7ffffc;
          auVar1796._8_4_ = 0x3eaaaaaa;
          auVar1796._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar1796._12_4_ = 0x3eaaaaaa;
          auVar1796._16_4_ = 0x3eaaaaaa;
          auVar1796._20_4_ = 0x3eaaaaaa;
          auVar1796._24_4_ = 0x3eaaaaaa;
          auVar1796._28_4_ = 0x3eaaaaaa;
          auVar677 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar678 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar442 = vxorps_avx512vl(auVar442,auVar442);
          auVar674 = vpcmpeqd_avx2(auVar674,auVar674);
          auVar460 = auVar674._0_16_;
          auVar679 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar680 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar683 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar684 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar685 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar701 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar565 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar566 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar567 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          uVar882 = uVar425;
          do {
            auVar202._8_4_ = 0x800000;
            auVar202._0_8_ = 0x80000000800000;
            auVar202._12_4_ = 0x800000;
            auVar202._16_4_ = 0x800000;
            auVar202._20_4_ = 0x800000;
            auVar202._24_4_ = 0x800000;
            auVar202._28_4_ = 0x800000;
            auVar568 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1,auVar202);
            auVar569 = vpsrld_avx512vl(auVar568,0x17);
            auVar979._8_4_ = 0x807fffff;
            auVar979._0_8_ = 0x807fffff807fffff;
            auVar979._12_4_ = 0x807fffff;
            auVar979._16_4_ = 0x807fffff;
            auVar979._20_4_ = 0x807fffff;
            auVar979._24_4_ = 0x807fffff;
            auVar979._28_4_ = 0x807fffff;
            auVar203._8_4_ = 0x3f000000;
            auVar203._0_8_ = 0x3f0000003f000000;
            auVar203._12_4_ = 0x3f000000;
            auVar203._16_4_ = 0x3f000000;
            auVar203._20_4_ = 0x3f000000;
            auVar203._24_4_ = 0x3f000000;
            auVar203._28_4_ = 0x3f000000;
            auVar568 = vpternlogd_avx512vl(auVar568,auVar979,auVar203,0xea);
            uVar47 = vcmpps_avx512vl(auVar568,auVar1191,1);
            auVar570 = vaddps_avx512vl(auVar568,auVar1246);
            auVar568 = vaddps_avx512vl(auVar570,auVar568);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar571._0_4_ = (float)((uint)bVar12 * auVar568._0_4_ | (uint)!bVar12 * auVar570._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar571._4_4_ = (float)((uint)bVar12 * auVar568._4_4_ | (uint)!bVar12 * auVar570._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar571._8_4_ = (float)((uint)bVar12 * auVar568._8_4_ | (uint)!bVar12 * auVar570._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar571._12_4_ =
                 (float)((uint)bVar12 * auVar568._12_4_ | (uint)!bVar12 * auVar570._12_4_);
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar571._16_4_ =
                 (float)((uint)bVar12 * auVar568._16_4_ | (uint)!bVar12 * auVar570._16_4_);
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar571._20_4_ =
                 (float)((uint)bVar12 * auVar568._20_4_ | (uint)!bVar12 * auVar570._20_4_);
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar571._24_4_ =
                 (float)((uint)bVar12 * auVar568._24_4_ | (uint)!bVar12 * auVar570._24_4_);
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar571._28_4_ = (uint)bVar12 * auVar568._28_4_ | (uint)!bVar12 * auVar570._28_4_;
            auVar568 = vfmadd213ps_avx512vl(auVar1367,auVar571,auVar1423);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar571,auVar1477);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar571,auVar1531);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar571,auVar1585);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar571,auVar1639);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar571,auVar1693);
            auVar1107._0_4_ = auVar571._0_4_ * auVar571._0_4_;
            auVar1107._4_4_ = auVar571._4_4_ * auVar571._4_4_;
            auVar1107._8_4_ = auVar571._8_4_ * auVar571._8_4_;
            auVar1107._12_4_ = auVar571._12_4_ * auVar571._12_4_;
            auVar1107._16_4_ = auVar571._16_4_ * auVar571._16_4_;
            auVar1107._20_4_ = auVar571._20_4_ * auVar571._20_4_;
            auVar1107._28_36_ = in_ZMM2._28_36_;
            auVar1107._24_4_ = auVar571._24_4_ * auVar571._24_4_;
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar571,auVar1746);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar571,auVar1796);
            auVar1158._0_4_ = auVar1107._0_4_ * auVar571._0_4_;
            auVar1158._4_4_ = auVar1107._4_4_ * auVar571._4_4_;
            auVar1158._8_4_ = auVar1107._8_4_ * auVar571._8_4_;
            auVar1158._12_4_ = auVar1107._12_4_ * auVar571._12_4_;
            auVar1158._16_4_ = auVar1107._16_4_ * auVar571._16_4_;
            auVar1158._20_4_ = auVar1107._20_4_ * auVar571._20_4_;
            auVar1158._28_36_ = in_ZMM3._28_36_;
            auVar1158._24_4_ = auVar1107._24_4_ * auVar571._24_4_;
            auVar568 = vmulps_avx512vl(auVar1158._0_32_,auVar568);
            auVar204._8_4_ = 0xffffff82;
            auVar204._0_8_ = 0xffffff82ffffff82;
            auVar204._12_4_ = 0xffffff82;
            auVar204._16_4_ = 0xffffff82;
            auVar204._20_4_ = 0xffffff82;
            auVar204._24_4_ = 0xffffff82;
            auVar204._28_4_ = 0xffffff82;
            auVar569 = vpaddd_avx512vl(auVar569,auVar204);
            auVar569 = vcvtdq2ps_avx512vl(auVar569);
            auVar570 = vsubps_avx512vl(auVar569,auVar1308);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar572._0_4_ = (uint)bVar12 * auVar570._0_4_ | (uint)!bVar12 * auVar569._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar572._4_4_ = (uint)bVar12 * auVar570._4_4_ | (uint)!bVar12 * auVar569._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar572._8_4_ = (uint)bVar12 * auVar570._8_4_ | (uint)!bVar12 * auVar569._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar572._12_4_ = (uint)bVar12 * auVar570._12_4_ | (uint)!bVar12 * auVar569._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar572._16_4_ = (uint)bVar12 * auVar570._16_4_ | (uint)!bVar12 * auVar569._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar572._20_4_ = (uint)bVar12 * auVar570._20_4_ | (uint)!bVar12 * auVar569._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar572._24_4_ = (uint)bVar12 * auVar570._24_4_ | (uint)!bVar12 * auVar569._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar572._28_4_ = (uint)bVar12 * auVar570._28_4_ | (uint)!bVar12 * auVar569._28_4_;
            auVar568 = vfmadd231ps_avx512vl(auVar568,auVar572,auVar677);
            auVar568 = vfmsub231ps_avx512vl(auVar568,auVar678,auVar1107._0_32_);
            auVar568 = vsubps_avx(auVar568,auVar571);
            auVar568 = vfmsub231ps_avx512vl(auVar568,auVar562,auVar572);
            uVar47 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1,
                                     ZEXT1632(auVar442),2);
            bVar12 = (bool)((byte)uVar47 & 1);
            bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar47 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar47 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar47 >> 6) & 1);
            bVar19 = SUB81(uVar47 >> 7,0);
            auVar369._4_4_ =
                 (float)((uint)bVar13 * auVar674._4_4_ | (uint)!bVar13 * auVar568._4_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 4);
            auVar369._0_4_ =
                 (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar568._0_4_) *
                 *(float *)*(undefined1 (*) [64])ptr;
            auVar369._8_4_ =
                 (float)((uint)bVar14 * auVar674._8_4_ | (uint)!bVar14 * auVar568._8_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 8);
            auVar369._12_4_ =
                 (float)((uint)bVar15 * auVar674._12_4_ | (uint)!bVar15 * auVar568._12_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            auVar369._16_4_ =
                 (float)((uint)bVar16 * auVar674._16_4_ | (uint)!bVar16 * auVar568._16_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x10);
            auVar369._20_4_ =
                 (float)((uint)bVar17 * auVar674._20_4_ | (uint)!bVar17 * auVar568._20_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x14);
            auVar369._24_4_ =
                 (float)((uint)bVar18 * auVar674._24_4_ | (uint)!bVar18 * auVar568._24_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x18);
            auVar369._28_4_ = (uint)bVar19 * auVar674._28_4_ | (uint)!bVar19 * auVar568._28_4_;
            auVar568 = vminps_avx512vl(auVar369,auVar679);
            auVar569 = vmaxps_avx512vl(auVar568,auVar680);
            auVar570 = vfmadd231ps_avx512vl(auVar678,auVar569,auVar683);
            auVar568 = vroundps_avx(auVar570,1);
            uVar47 = vcmpps_avx512vl(auVar570,auVar568,1);
            auVar570 = vsubps_avx512vl(auVar568,auVar1308);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar573._0_4_ = (float)((uint)bVar12 * auVar570._0_4_ | (uint)!bVar12 * auVar568._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar573._4_4_ = (float)((uint)bVar12 * auVar570._4_4_ | (uint)!bVar12 * auVar568._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar573._8_4_ = (float)((uint)bVar12 * auVar570._8_4_ | (uint)!bVar12 * auVar568._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar573._12_4_ =
                 (float)((uint)bVar12 * auVar570._12_4_ | (uint)!bVar12 * auVar568._12_4_);
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar573._16_4_ =
                 (float)((uint)bVar12 * auVar570._16_4_ | (uint)!bVar12 * auVar568._16_4_);
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar573._20_4_ =
                 (float)((uint)bVar12 * auVar570._20_4_ | (uint)!bVar12 * auVar568._20_4_);
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar573._24_4_ =
                 (float)((uint)bVar12 * auVar570._24_4_ | (uint)!bVar12 * auVar568._24_4_);
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar573._28_4_ =
                 (float)((uint)bVar12 * auVar570._28_4_ | (uint)!bVar12 * auVar568._28_4_);
            in_ZMM3 = ZEXT3264(auVar573);
            auVar568 = vfmsub231ps_avx512vl(auVar569,auVar573,auVar562);
            auVar568 = vfnmsub231ps_avx512vl(auVar568,auVar573,auVar677);
            auVar569 = vfmadd213ps_avx512vl(auVar684,auVar568,auVar685);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar701);
            auVar570 = vmulps_avx512vl(auVar568,auVar568);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar565);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar566);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar678);
            auVar568 = vfmadd213ps_avx512vl(auVar569,auVar570,auVar568);
            in_ZMM2 = ZEXT3264(auVar568);
            auVar980._0_4_ = (int)auVar573._0_4_;
            auVar980._4_4_ = (int)auVar573._4_4_;
            auVar980._8_4_ = (int)auVar573._8_4_;
            auVar980._12_4_ = (int)auVar573._12_4_;
            auVar980._16_4_ = (int)auVar573._16_4_;
            auVar980._20_4_ = (int)auVar573._20_4_;
            auVar980._24_4_ = (int)auVar573._24_4_;
            auVar980._28_4_ = (int)auVar573._28_4_;
            auVar569 = vpslld_avx2(auVar980,0x17);
            auVar569 = vpaddd_avx512vl(auVar569,auVar567);
            auVar461 = vfmadd213ps_fma(auVar569,auVar568,auVar569);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar461);
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)(uVar425 | 3) < (int)uVar427) {
          auVar1111._8_4_ = 0xffffff82;
          auVar1111._0_8_ = 0xffffff82ffffff82;
          auVar1111._12_4_ = 0xffffff82;
          auVar1163._8_4_ = 0x3f3504f3;
          auVar1163._0_8_ = 0x3f3504f33f3504f3;
          auVar1163._12_4_ = 0x3f3504f3;
          auVar1217._8_4_ = 0xbf800000;
          auVar1217._0_8_ = 0xbf800000bf800000;
          auVar1217._12_4_ = 0xbf800000;
          auVar1281._8_4_ = 0x3f800000;
          auVar1281._0_8_ = 0x3f8000003f800000;
          auVar1281._12_4_ = 0x3f800000;
          auVar1344._8_4_ = 0x3d9021bb;
          auVar1344._0_8_ = 0x3d9021bb3d9021bb;
          auVar1344._12_4_ = 0x3d9021bb;
          auVar1400._8_4_ = 0xbdebd1b8;
          auVar1400._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar1400._12_4_ = 0xbdebd1b8;
          auVar1454._8_4_ = 0x3def251a;
          auVar1454._0_8_ = 0x3def251a3def251a;
          auVar1454._12_4_ = 0x3def251a;
          auVar1508._8_4_ = 0xbdfe5d4f;
          auVar1508._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar1508._12_4_ = 0xbdfe5d4f;
          auVar1562._8_4_ = 0x3e11e9bf;
          auVar1562._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar1562._12_4_ = 0x3e11e9bf;
          auVar1616._8_4_ = 0xbe2aae50;
          auVar1616._0_8_ = 0xbe2aae50be2aae50;
          auVar1616._12_4_ = 0xbe2aae50;
          auVar1670._8_4_ = 0x3e4cceac;
          auVar1670._0_8_ = 0x3e4cceac3e4cceac;
          auVar1670._12_4_ = 0x3e4cceac;
          auVar1724._8_4_ = 0xbe7ffffc;
          auVar1724._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar1724._12_4_ = 0xbe7ffffc;
          auVar1776._8_4_ = 0x3eaaaaaa;
          auVar1776._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar1776._12_4_ = 0x3eaaaaaa;
          auVar461 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar519 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar472 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar464 = vxorps_avx512vl(auVar442,auVar442);
          auVar442 = vpcmpeqd_avx(auVar460,auVar460);
          auVar460 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar465 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar466 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar469 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar470 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar523 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar443 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar445 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          uVar882 = uVar425;
          do {
            auVar73._8_4_ = 0x800000;
            auVar73._0_8_ = 0x80000000800000;
            auVar73._12_4_ = 0x800000;
            auVar446 = vmaxps_avx512vl(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1,auVar73);
            auVar447 = vpsrld_avx512vl(auVar446,0x17);
            auVar937._8_4_ = 0x807fffff;
            auVar937._0_8_ = 0x807fffff807fffff;
            auVar937._12_4_ = 0x807fffff;
            auVar74._8_4_ = 0x3f000000;
            auVar74._0_8_ = 0x3f0000003f000000;
            auVar74._12_4_ = 0x3f000000;
            auVar446 = vpternlogd_avx512vl(auVar446,auVar937,auVar74,0xea);
            uVar47 = vcmpps_avx512vl(auVar446,auVar1163,1);
            auVar439 = vaddps_avx512vl(auVar446,auVar1217);
            auVar446 = vaddps_avx512vl(auVar439,auVar446);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar448._0_4_ = (uint)bVar12 * auVar446._0_4_ | (uint)!bVar12 * auVar439._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar448._4_4_ = (uint)bVar12 * auVar446._4_4_ | (uint)!bVar12 * auVar439._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar448._8_4_ = (uint)bVar12 * auVar446._8_4_ | (uint)!bVar12 * auVar439._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar448._12_4_ = (uint)bVar12 * auVar446._12_4_ | (uint)!bVar12 * auVar439._12_4_;
            auVar446 = vfmadd213ps_avx512vl(auVar1344,auVar448,auVar1400);
            auVar446 = vfmadd213ps_avx512vl(auVar446,auVar448,auVar1454);
            auVar446 = vfmadd213ps_avx512vl(auVar446,auVar448,auVar1508);
            uVar430 = vcmpps_avx512vl(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1,auVar464,2);
            auVar446 = vfmadd213ps_avx512vl(auVar446,auVar448,auVar1562);
            auVar446 = vfmadd213ps_avx512vl(auVar446,auVar448,auVar1616);
            auVar446 = vfmadd213ps_avx512vl(auVar446,auVar448,auVar1670);
            auVar439 = vmulps_avx512vl(auVar448,auVar448);
            auVar446 = vfmadd213ps_avx512vl(auVar446,auVar448,auVar1724);
            auVar446 = vfmadd213ps_avx512vl(auVar446,auVar448,auVar1776);
            auVar440 = vmulps_avx512vl(auVar439,auVar448);
            auVar446 = vmulps_avx512vl(auVar440,auVar446);
            auVar447 = vpaddd_avx512vl(auVar447,auVar1111);
            auVar447 = vcvtdq2ps_avx512vl(auVar447);
            auVar440 = vsubps_avx512vl(auVar447,auVar1281);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar449._0_4_ = (uint)bVar12 * auVar440._0_4_ | (uint)!bVar12 * auVar447._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar449._4_4_ = (uint)bVar12 * auVar440._4_4_ | (uint)!bVar12 * auVar447._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar449._8_4_ = (uint)bVar12 * auVar440._8_4_ | (uint)!bVar12 * auVar447._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar449._12_4_ = (uint)bVar12 * auVar440._12_4_ | (uint)!bVar12 * auVar447._12_4_;
            auVar446 = vfmadd231ps_avx512vl(auVar446,auVar449,auVar461);
            auVar446 = vfmsub231ps_avx512vl(auVar446,auVar519,auVar439);
            auVar446 = vsubps_avx(auVar446,auVar448);
            auVar446 = vfmsub231ps_avx512vl(auVar446,auVar472,auVar449);
            bVar12 = (bool)((byte)uVar430 & 1);
            bVar13 = (bool)((byte)(uVar430 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar430 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar938._0_4_ =
                 (float)((uint)bVar12 * auVar442._0_4_ | (uint)!bVar12 * auVar446._0_4_) *
                 *(float *)*(undefined1 (*) [64])ptr;
            auVar938._4_4_ =
                 (float)((uint)bVar13 * auVar442._4_4_ | (uint)!bVar13 * auVar446._4_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 4);
            auVar938._8_4_ =
                 (float)((uint)bVar14 * auVar442._8_4_ | (uint)!bVar14 * auVar446._8_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 8);
            auVar938._12_4_ =
                 (float)((uint)bVar15 * auVar442._12_4_ | (uint)!bVar15 * auVar446._12_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            auVar446 = vminps_avx512vl(auVar938,auVar460);
            auVar446 = vmaxps_avx512vl(auVar446,auVar465);
            auVar447 = vfmadd231ps_avx512vl(auVar519,auVar446,auVar466);
            auVar439 = vcvttps2dq_avx512vl(auVar447);
            auVar439 = vcvtdq2ps_avx512vl(auVar439);
            uVar47 = vcmpps_avx512vl(auVar447,auVar439,1);
            auVar447 = vsubps_avx512vl(auVar439,auVar1281);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar450._0_4_ = (uint)bVar12 * auVar447._0_4_ | (uint)!bVar12 * auVar439._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar450._4_4_ = (uint)bVar12 * auVar447._4_4_ | (uint)!bVar12 * auVar439._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar450._8_4_ = (uint)bVar12 * auVar447._8_4_ | (uint)!bVar12 * auVar439._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar450._12_4_ = (uint)bVar12 * auVar447._12_4_ | (uint)!bVar12 * auVar439._12_4_;
            auVar446 = vfmsub231ps_avx512vl(auVar446,auVar450,auVar472);
            auVar446 = vfnmsub231ps_avx512vl(auVar446,auVar450,auVar461);
            auVar447 = vfmadd213ps_avx512vl(auVar469,auVar446,auVar470);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar523);
            auVar439 = vmulps_avx512vl(auVar446,auVar446);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar443);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar444);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar519);
            auVar446 = vfmadd213ps_avx512vl(auVar447,auVar439,auVar446);
            auVar447 = vcvttps2dq_avx512vl(auVar450);
            auVar447 = vpslld_avx(auVar447,0x17);
            auVar447 = vpaddd_avx512vl(auVar447,auVar445);
            auVar446 = vfmadd213ps_fma(auVar447,auVar446,auVar447);
            *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar446;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
            uVar425 = uVar882 + 4;
            iVar424 = uVar882 + 7;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          return;
        }
        lVar428 = 0;
        do {
          fVar890 = powf(*(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4),
                         *(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4));
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = fVar890;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (bw == 1) {
        fVar890 = *ptr1;
        if (iVar424 == 4) {
          auVar892 = *(undefined1 (*) [16])ptr1;
        }
        else {
          auVar892._4_4_ = fVar890;
          auVar892._0_4_ = fVar890;
          auVar892._8_4_ = fVar890;
          auVar892._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1025 = *(undefined1 (*) [32])ptr1;
        }
        else {
          auVar1025._16_16_ = auVar892;
          auVar1025._0_16_ = auVar892;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr1;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1025),auVar1025,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          uVar47 = vcmpps_avx512f(auVar734,ZEXT864(0),2);
          auVar734 = vmaxps_avx512f(auVar734,(undefined1  [64])_ps512_min_norm_pos);
          auVar716 = vpsrld_avx512f(auVar734,0x17);
          auVar717 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar734 = vpternlogd_avx512f(auVar734,auVar717,(undefined1  [64])_ps512_inv_mant_mask,
                                        0xec);
          auVar718 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar716 = vpsubd_avx512f(auVar716,auVar718);
          auVar716 = vcvtdq2ps_avx512f(auVar716);
          uVar430 = vcmpps_avx512f(auVar734,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar719 = vsubps_avx512f(auVar734,(undefined1  [64])::_ps512_1);
          auVar720 = vaddps_avx512f(auVar716,(undefined1  [64])::_ps512_1);
          bVar12 = (bool)((byte)uVar430 & 1);
          auVar856._0_4_ = (uint)bVar12 * auVar716._0_4_ | (uint)!bVar12 * auVar720._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar856._4_4_ = (uint)bVar12 * auVar716._4_4_ | (uint)!bVar12 * auVar720._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar856._8_4_ = (uint)bVar12 * auVar716._8_4_ | (uint)!bVar12 * auVar720._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar856._12_4_ = (uint)bVar12 * auVar716._12_4_ | (uint)!bVar12 * auVar720._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar856._16_4_ = (uint)bVar12 * auVar716._16_4_ | (uint)!bVar12 * auVar720._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar856._20_4_ = (uint)bVar12 * auVar716._20_4_ | (uint)!bVar12 * auVar720._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar856._24_4_ = (uint)bVar12 * auVar716._24_4_ | (uint)!bVar12 * auVar720._24_4_;
          bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
          auVar856._28_4_ = (uint)bVar12 * auVar716._28_4_ | (uint)!bVar12 * auVar720._28_4_;
          bVar29 = (byte)(uVar430 >> 8);
          bVar12 = (bool)(bVar29 & 1);
          auVar856._32_4_ = (uint)bVar12 * auVar716._32_4_ | (uint)!bVar12 * auVar720._32_4_;
          bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
          auVar856._36_4_ = (uint)bVar12 * auVar716._36_4_ | (uint)!bVar12 * auVar720._36_4_;
          bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
          auVar856._40_4_ = (uint)bVar12 * auVar716._40_4_ | (uint)!bVar12 * auVar720._40_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
          auVar856._44_4_ = (uint)bVar12 * auVar716._44_4_ | (uint)!bVar12 * auVar720._44_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
          auVar856._48_4_ = (uint)bVar12 * auVar716._48_4_ | (uint)!bVar12 * auVar720._48_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
          auVar856._52_4_ = (uint)bVar12 * auVar716._52_4_ | (uint)!bVar12 * auVar720._52_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
          auVar856._56_4_ = (uint)bVar12 * auVar716._56_4_ | (uint)!bVar12 * auVar720._56_4_;
          bVar12 = SUB81(uVar430 >> 0xf,0);
          auVar856._60_4_ = (uint)bVar12 * auVar716._60_4_ | (uint)!bVar12 * auVar720._60_4_;
          auVar734 = vaddps_avx512f(auVar719,auVar734);
          bVar12 = (bool)((byte)uVar430 & 1);
          auVar857._0_4_ = (uint)bVar12 * auVar734._0_4_ | (uint)!bVar12 * auVar719._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar857._4_4_ = (uint)bVar12 * auVar734._4_4_ | (uint)!bVar12 * auVar719._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar857._8_4_ = (uint)bVar12 * auVar734._8_4_ | (uint)!bVar12 * auVar719._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar857._12_4_ = (uint)bVar12 * auVar734._12_4_ | (uint)!bVar12 * auVar719._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar857._16_4_ = (uint)bVar12 * auVar734._16_4_ | (uint)!bVar12 * auVar719._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar857._20_4_ = (uint)bVar12 * auVar734._20_4_ | (uint)!bVar12 * auVar719._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar857._24_4_ = (uint)bVar12 * auVar734._24_4_ | (uint)!bVar12 * auVar719._24_4_;
          bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
          auVar857._28_4_ = (uint)bVar12 * auVar734._28_4_ | (uint)!bVar12 * auVar719._28_4_;
          bVar12 = (bool)(bVar29 & 1);
          auVar857._32_4_ = (uint)bVar12 * auVar734._32_4_ | (uint)!bVar12 * auVar719._32_4_;
          bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
          auVar857._36_4_ = (uint)bVar12 * auVar734._36_4_ | (uint)!bVar12 * auVar719._36_4_;
          bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
          auVar857._40_4_ = (uint)bVar12 * auVar734._40_4_ | (uint)!bVar12 * auVar719._40_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
          auVar857._44_4_ = (uint)bVar12 * auVar734._44_4_ | (uint)!bVar12 * auVar719._44_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
          auVar857._48_4_ = (uint)bVar12 * auVar734._48_4_ | (uint)!bVar12 * auVar719._48_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
          auVar857._52_4_ = (uint)bVar12 * auVar734._52_4_ | (uint)!bVar12 * auVar719._52_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
          auVar857._56_4_ = (uint)bVar12 * auVar734._56_4_ | (uint)!bVar12 * auVar719._56_4_;
          bVar12 = SUB81(uVar430 >> 0xf,0);
          auVar857._60_4_ = (uint)bVar12 * auVar734._60_4_ | (uint)!bVar12 * auVar719._60_4_;
          auVar734 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_log_p0,auVar857,
                                         (undefined1  [64])_ps512_cephes_log_p1);
          auVar734 = vfmadd213ps_avx512f(auVar734,auVar857,(undefined1  [64])_ps512_cephes_log_p2);
          auVar734 = vfmadd213ps_avx512f(auVar734,auVar857,(undefined1  [64])_ps512_cephes_log_p3);
          auVar734 = vfmadd213ps_avx512f(auVar734,auVar857,(undefined1  [64])_ps512_cephes_log_p4);
          auVar734 = vfmadd213ps_avx512f(auVar734,auVar857,(undefined1  [64])_ps512_cephes_log_p5);
          auVar734 = vfmadd213ps_avx512f(auVar734,auVar857,(undefined1  [64])_ps512_cephes_log_p6);
          auVar734 = vfmadd213ps_avx512f(auVar734,auVar857,(undefined1  [64])_ps512_cephes_log_p7);
          auVar734 = vfmadd213ps_avx512f(auVar734,auVar857,(undefined1  [64])_ps512_cephes_log_p8);
          auVar716 = vmulps_avx512f(auVar857,auVar857);
          auVar719 = vmulps_avx512f(auVar716,auVar857);
          auVar734 = vmulps_avx512f(auVar719,auVar734);
          auVar734 = vfmadd231ps_avx512f(auVar734,auVar856,(undefined1  [64])_ps512_cephes_log_q1);
          auVar734 = vfmsub231ps_avx512f(auVar734,auVar717,auVar716);
          auVar734 = vsubps_avx512f(auVar734,auVar857);
          auVar734 = vfmsub231ps_avx512f(auVar734,(undefined1  [64])_ps512_cephes_log_q2,auVar856);
          auVar716 = vpternlogd_avx512f(auVar716,auVar716,auVar716,0xff);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar858._0_4_ = (uint)bVar12 * auVar716._0_4_ | (uint)!bVar12 * auVar734._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar858._4_4_ = (uint)bVar12 * auVar716._4_4_ | (uint)!bVar12 * auVar734._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar858._8_4_ = (uint)bVar12 * auVar716._8_4_ | (uint)!bVar12 * auVar734._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar858._12_4_ = (uint)bVar12 * auVar716._12_4_ | (uint)!bVar12 * auVar734._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar858._16_4_ = (uint)bVar12 * auVar716._16_4_ | (uint)!bVar12 * auVar734._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar858._20_4_ = (uint)bVar12 * auVar716._20_4_ | (uint)!bVar12 * auVar734._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar858._24_4_ = (uint)bVar12 * auVar716._24_4_ | (uint)!bVar12 * auVar734._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar858._28_4_ = (uint)bVar12 * auVar716._28_4_ | (uint)!bVar12 * auVar734._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar858._32_4_ = (uint)bVar12 * auVar716._32_4_ | (uint)!bVar12 * auVar734._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar858._36_4_ = (uint)bVar12 * auVar716._36_4_ | (uint)!bVar12 * auVar734._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar858._40_4_ = (uint)bVar12 * auVar716._40_4_ | (uint)!bVar12 * auVar734._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar858._44_4_ = (uint)bVar12 * auVar716._44_4_ | (uint)!bVar12 * auVar734._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar858._48_4_ = (uint)bVar12 * auVar716._48_4_ | (uint)!bVar12 * auVar734._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar858._52_4_ = (uint)bVar12 * auVar716._52_4_ | (uint)!bVar12 * auVar734._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar858._56_4_ = (uint)bVar12 * auVar716._56_4_ | (uint)!bVar12 * auVar734._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar858._60_4_ = (uint)bVar12 * auVar716._60_4_ | (uint)!bVar12 * auVar734._60_4_;
          auVar734 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          auVar716 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar734);
          auVar734 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar734);
          iVar424 = 0xf;
          do {
            auVar719 = vmulps_avx512f(auVar858,*(undefined1 (*) [64])ptr);
            auVar719 = vminps_avx512f(auVar719,(undefined1  [64])afVar408);
            auVar719 = vmaxps_avx512f(auVar719,(undefined1  [64])afVar409);
            auVar720 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar719,auVar717);
            auVar721 = vrndscaleps_avx512f(auVar720,1);
            uVar47 = vcmpps_avx512f(auVar720,auVar721,1);
            auVar720 = vsubps_avx512f(auVar721,(undefined1  [64])afVar407);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar859._0_4_ = (uint)bVar12 * auVar720._0_4_ | (uint)!bVar12 * auVar721._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar859._4_4_ = (uint)bVar12 * auVar720._4_4_ | (uint)!bVar12 * auVar721._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar859._8_4_ = (uint)bVar12 * auVar720._8_4_ | (uint)!bVar12 * auVar721._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar859._12_4_ = (uint)bVar12 * auVar720._12_4_ | (uint)!bVar12 * auVar721._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar859._16_4_ = (uint)bVar12 * auVar720._16_4_ | (uint)!bVar12 * auVar721._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar859._20_4_ = (uint)bVar12 * auVar720._20_4_ | (uint)!bVar12 * auVar721._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar859._24_4_ = (uint)bVar12 * auVar720._24_4_ | (uint)!bVar12 * auVar721._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar859._28_4_ = (uint)bVar12 * auVar720._28_4_ | (uint)!bVar12 * auVar721._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            auVar859._32_4_ = (uint)bVar12 * auVar720._32_4_ | (uint)!bVar12 * auVar721._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar859._36_4_ = (uint)bVar12 * auVar720._36_4_ | (uint)!bVar12 * auVar721._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar859._40_4_ = (uint)bVar12 * auVar720._40_4_ | (uint)!bVar12 * auVar721._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar859._44_4_ = (uint)bVar12 * auVar720._44_4_ | (uint)!bVar12 * auVar721._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar859._48_4_ = (uint)bVar12 * auVar720._48_4_ | (uint)!bVar12 * auVar721._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar859._52_4_ = (uint)bVar12 * auVar720._52_4_ | (uint)!bVar12 * auVar721._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar859._56_4_ = (uint)bVar12 * auVar720._56_4_ | (uint)!bVar12 * auVar721._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar859._60_4_ = (uint)bVar12 * auVar720._60_4_ | (uint)!bVar12 * auVar721._60_4_;
            auVar719 = vfmadd231ps_avx512f(auVar719,auVar859,auVar716);
            auVar719 = vfmadd231ps_avx512f(auVar719,auVar859,auVar734);
            auVar720 = vfmadd213ps_avx512f(auVar719,(undefined1  [64])afVar411,
                                           (undefined1  [64])afVar412);
            auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar413);
            auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar414);
            auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar415);
            auVar721 = vmulps_avx512f(auVar719,auVar719);
            auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,auVar717);
            auVar719 = vfmadd213ps_avx512f(auVar720,auVar721,auVar719);
            auVar720 = vcvttps2dq_avx512f(auVar859);
            auVar719 = vaddps_avx512f(auVar719,(undefined1  [64])afVar407);
            auVar720 = vpaddd_avx512f(auVar720,auVar718);
            auVar720 = vpslld_avx512f(auVar720,0x17);
            auVar719 = vmulps_avx512f(auVar719,auVar720);
            *(undefined1 (*) [64])outptr = auVar719;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
          in_ZMM15 = afVar415;
        }
        if ((int)(uVar425 | 7) < (int)uVar427) {
          auVar205._8_4_ = 0x800000;
          auVar205._0_8_ = 0x80000000800000;
          auVar205._12_4_ = 0x800000;
          auVar205._16_4_ = 0x800000;
          auVar205._20_4_ = 0x800000;
          auVar205._24_4_ = 0x800000;
          auVar205._28_4_ = 0x800000;
          auVar674 = vmaxps_avx512vl(auVar1025,auVar205);
          auVar678 = vpsrld_avx2(auVar674,0x17);
          auVar1209._8_4_ = 0x3f000000;
          auVar1209._0_8_ = 0x3f0000003f000000;
          auVar1209._12_4_ = 0x3f000000;
          auVar1209._16_4_ = 0x3f000000;
          auVar1209._20_4_ = 0x3f000000;
          auVar1209._24_4_ = 0x3f000000;
          auVar1209._28_4_ = 0x3f000000;
          auVar206._8_4_ = 0x807fffff;
          auVar206._0_8_ = 0x807fffff807fffff;
          auVar206._12_4_ = 0x807fffff;
          auVar206._16_4_ = 0x807fffff;
          auVar206._20_4_ = 0x807fffff;
          auVar206._24_4_ = 0x807fffff;
          auVar206._28_4_ = 0x807fffff;
          auVar677 = vpternlogd_avx512vl(auVar1209,auVar674,auVar206,0xf8);
          auVar207._8_4_ = 0xffffff82;
          auVar207._0_8_ = 0xffffff82ffffff82;
          auVar207._12_4_ = 0xffffff82;
          auVar207._16_4_ = 0xffffff82;
          auVar207._20_4_ = 0xffffff82;
          auVar207._24_4_ = 0xffffff82;
          auVar207._28_4_ = 0xffffff82;
          auVar674 = vpaddd_avx512vl(auVar678,auVar207);
          auVar674 = vcvtdq2ps_avx(auVar674);
          auVar208._8_4_ = 0x3f3504f3;
          auVar208._0_8_ = 0x3f3504f33f3504f3;
          auVar208._12_4_ = 0x3f3504f3;
          auVar208._16_4_ = 0x3f3504f3;
          auVar208._20_4_ = 0x3f3504f3;
          auVar208._24_4_ = 0x3f3504f3;
          auVar208._28_4_ = 0x3f3504f3;
          uVar47 = vcmpps_avx512vl(auVar677,auVar208,1);
          auVar1084._8_4_ = 0xbf800000;
          auVar1084._0_8_ = 0xbf800000bf800000;
          auVar1084._12_4_ = 0xbf800000;
          auVar1084._16_4_ = 0xbf800000;
          auVar1084._20_4_ = 0xbf800000;
          auVar1084._24_4_ = 0xbf800000;
          auVar1084._28_4_ = 0xbf800000;
          auVar1334._0_4_ = auVar677._0_4_ + -1.0;
          auVar1334._4_4_ = auVar677._4_4_ + -1.0;
          auVar1334._8_4_ = auVar677._8_4_ + -1.0;
          auVar1334._12_4_ = auVar677._12_4_ + -1.0;
          auVar1334._16_4_ = auVar677._16_4_ + -1.0;
          auVar1334._20_4_ = auVar677._20_4_ + -1.0;
          auVar1334._24_4_ = auVar677._24_4_ + -1.0;
          auVar1334._28_4_ = auVar677._28_4_ + -1.0;
          auVar678 = vaddps_avx512vl(auVar674,auVar1084);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar687._0_4_ = (uint)bVar12 * auVar678._0_4_ | (uint)!bVar12 * auVar674._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar687._4_4_ = (uint)bVar12 * auVar678._4_4_ | (uint)!bVar12 * auVar674._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar687._8_4_ = (uint)bVar12 * auVar678._8_4_ | (uint)!bVar12 * auVar674._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar687._12_4_ = (uint)bVar12 * auVar678._12_4_ | (uint)!bVar12 * auVar674._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar687._16_4_ = (uint)bVar12 * auVar678._16_4_ | (uint)!bVar12 * auVar674._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar687._20_4_ = (uint)bVar12 * auVar678._20_4_ | (uint)!bVar12 * auVar674._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar687._24_4_ = (uint)bVar12 * auVar678._24_4_ | (uint)!bVar12 * auVar674._24_4_;
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar687._28_4_ = (uint)bVar12 * auVar678._28_4_ | (uint)!bVar12 * auVar674._28_4_;
          auVar674 = vaddps_avx512vl(auVar1334,auVar677);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar688._0_4_ =
               (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * (int)auVar1334._0_4_);
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar688._4_4_ =
               (float)((uint)bVar12 * auVar674._4_4_ | (uint)!bVar12 * (int)auVar1334._4_4_);
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar688._8_4_ =
               (float)((uint)bVar12 * auVar674._8_4_ | (uint)!bVar12 * (int)auVar1334._8_4_);
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar688._12_4_ =
               (float)((uint)bVar12 * auVar674._12_4_ | (uint)!bVar12 * (int)auVar1334._12_4_);
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar688._16_4_ =
               (float)((uint)bVar12 * auVar674._16_4_ | (uint)!bVar12 * (int)auVar1334._16_4_);
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar688._20_4_ =
               (float)((uint)bVar12 * auVar674._20_4_ | (uint)!bVar12 * (int)auVar1334._20_4_);
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar688._24_4_ =
               (float)((uint)bVar12 * auVar674._24_4_ | (uint)!bVar12 * (int)auVar1334._24_4_);
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar688._28_4_ = (uint)bVar12 * auVar674._28_4_ | (uint)!bVar12 * (int)auVar1334._28_4_;
          auVar387._4_4_ = auVar688._4_4_ * auVar688._4_4_;
          auVar387._0_4_ = auVar688._0_4_ * auVar688._0_4_;
          auVar387._8_4_ = auVar688._8_4_ * auVar688._8_4_;
          auVar387._12_4_ = auVar688._12_4_ * auVar688._12_4_;
          auVar387._16_4_ = auVar688._16_4_ * auVar688._16_4_;
          auVar387._20_4_ = auVar688._20_4_ * auVar688._20_4_;
          auVar387._24_4_ = auVar688._24_4_ * auVar688._24_4_;
          auVar387._28_4_ = auVar677._28_4_;
          auVar1390._8_4_ = 0x3d9021bb;
          auVar1390._0_8_ = 0x3d9021bb3d9021bb;
          auVar1390._12_4_ = 0x3d9021bb;
          auVar1390._16_4_ = 0x3d9021bb;
          auVar1390._20_4_ = 0x3d9021bb;
          auVar1390._24_4_ = 0x3d9021bb;
          auVar1390._28_4_ = 0x3d9021bb;
          auVar209._8_4_ = 0xbdebd1b8;
          auVar209._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar209._12_4_ = 0xbdebd1b8;
          auVar209._16_4_ = 0xbdebd1b8;
          auVar209._20_4_ = 0xbdebd1b8;
          auVar209._24_4_ = 0xbdebd1b8;
          auVar209._28_4_ = 0xbdebd1b8;
          auVar674 = vfmadd213ps_avx512vl(auVar1390,auVar688,auVar209);
          auVar210._8_4_ = 0x3def251a;
          auVar210._0_8_ = 0x3def251a3def251a;
          auVar210._12_4_ = 0x3def251a;
          auVar210._16_4_ = 0x3def251a;
          auVar210._20_4_ = 0x3def251a;
          auVar210._24_4_ = 0x3def251a;
          auVar210._28_4_ = 0x3def251a;
          auVar674 = vfmadd213ps_avx512vl(auVar674,auVar688,auVar210);
          auVar211._8_4_ = 0xbdfe5d4f;
          auVar211._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar211._12_4_ = 0xbdfe5d4f;
          auVar211._16_4_ = 0xbdfe5d4f;
          auVar211._20_4_ = 0xbdfe5d4f;
          auVar211._24_4_ = 0xbdfe5d4f;
          auVar211._28_4_ = 0xbdfe5d4f;
          auVar674 = vfmadd213ps_avx512vl(auVar674,auVar688,auVar211);
          auVar212._8_4_ = 0x3e11e9bf;
          auVar212._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar212._12_4_ = 0x3e11e9bf;
          auVar212._16_4_ = 0x3e11e9bf;
          auVar212._20_4_ = 0x3e11e9bf;
          auVar212._24_4_ = 0x3e11e9bf;
          auVar212._28_4_ = 0x3e11e9bf;
          auVar674 = vfmadd213ps_avx512vl(auVar674,auVar688,auVar212);
          auVar213._8_4_ = 0xbe2aae50;
          auVar213._0_8_ = 0xbe2aae50be2aae50;
          auVar213._12_4_ = 0xbe2aae50;
          auVar213._16_4_ = 0xbe2aae50;
          auVar213._20_4_ = 0xbe2aae50;
          auVar213._24_4_ = 0xbe2aae50;
          auVar213._28_4_ = 0xbe2aae50;
          auVar674 = vfmadd213ps_avx512vl(auVar674,auVar688,auVar213);
          auVar214._8_4_ = 0x3e4cceac;
          auVar214._0_8_ = 0x3e4cceac3e4cceac;
          auVar214._12_4_ = 0x3e4cceac;
          auVar214._16_4_ = 0x3e4cceac;
          auVar214._20_4_ = 0x3e4cceac;
          auVar214._24_4_ = 0x3e4cceac;
          auVar214._28_4_ = 0x3e4cceac;
          auVar674 = vfmadd213ps_avx512vl(auVar674,auVar688,auVar214);
          auVar215._8_4_ = 0xbe7ffffc;
          auVar215._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar215._12_4_ = 0xbe7ffffc;
          auVar215._16_4_ = 0xbe7ffffc;
          auVar215._20_4_ = 0xbe7ffffc;
          auVar215._24_4_ = 0xbe7ffffc;
          auVar215._28_4_ = 0xbe7ffffc;
          auVar674 = vfmadd213ps_avx512vl(auVar674,auVar688,auVar215);
          auVar216._8_4_ = 0x3eaaaaaa;
          auVar216._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar216._12_4_ = 0x3eaaaaaa;
          auVar216._16_4_ = 0x3eaaaaaa;
          auVar216._20_4_ = 0x3eaaaaaa;
          auVar216._24_4_ = 0x3eaaaaaa;
          auVar216._28_4_ = 0x3eaaaaaa;
          auVar674 = vfmadd213ps_avx512vl(auVar674,auVar688,auVar216);
          auVar388._4_4_ = auVar688._4_4_ * auVar688._4_4_ * auVar688._4_4_ * auVar674._4_4_;
          auVar388._0_4_ = auVar688._0_4_ * auVar688._0_4_ * auVar688._0_4_ * auVar674._0_4_;
          auVar388._8_4_ = auVar688._8_4_ * auVar688._8_4_ * auVar688._8_4_ * auVar674._8_4_;
          auVar388._12_4_ = auVar688._12_4_ * auVar688._12_4_ * auVar688._12_4_ * auVar674._12_4_;
          auVar388._16_4_ = auVar688._16_4_ * auVar688._16_4_ * auVar688._16_4_ * auVar674._16_4_;
          auVar388._20_4_ = auVar688._20_4_ * auVar688._20_4_ * auVar688._20_4_ * auVar674._20_4_;
          auVar388._24_4_ = auVar688._24_4_ * auVar688._24_4_ * auVar688._24_4_ * auVar674._24_4_;
          auVar388._28_4_ = auVar674._28_4_;
          auVar217._8_4_ = 0xb95e8083;
          auVar217._0_8_ = 0xb95e8083b95e8083;
          auVar217._12_4_ = 0xb95e8083;
          auVar217._16_4_ = 0xb95e8083;
          auVar217._20_4_ = 0xb95e8083;
          auVar217._24_4_ = 0xb95e8083;
          auVar217._28_4_ = 0xb95e8083;
          auVar674 = vfmadd231ps_avx512vl(auVar388,auVar687,auVar217);
          auVar678 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          uVar47 = vcmpps_avx512vl(auVar1025,auVar678,2);
          auVar218._8_4_ = 0x3f000000;
          auVar218._0_8_ = 0x3f0000003f000000;
          auVar218._12_4_ = 0x3f000000;
          auVar218._16_4_ = 0x3f000000;
          auVar218._20_4_ = 0x3f000000;
          auVar218._24_4_ = 0x3f000000;
          auVar218._28_4_ = 0x3f000000;
          auVar674 = vfmsub231ps_avx512vl(auVar674,auVar387,auVar218);
          auVar674 = vsubps_avx(auVar674,auVar688);
          auVar219._8_4_ = 0x3f318000;
          auVar219._0_8_ = 0x3f3180003f318000;
          auVar219._12_4_ = 0x3f318000;
          auVar219._16_4_ = 0x3f318000;
          auVar219._20_4_ = 0x3f318000;
          auVar219._24_4_ = 0x3f318000;
          auVar219._28_4_ = 0x3f318000;
          auVar677 = vfmsub231ps_avx512vl(auVar674,auVar687,auVar219);
          auVar674 = vpcmpeqd_avx2(auVar678,auVar678);
          bVar12 = (bool)((byte)uVar47 & 1);
          bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar47 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar47 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar1150._8_4_ = 0x42b0c0a5;
          auVar1150._0_8_ = 0x42b0c0a542b0c0a5;
          auVar1150._12_4_ = 0x42b0c0a5;
          auVar1150._16_4_ = 0x42b0c0a5;
          auVar1150._20_4_ = 0x42b0c0a5;
          auVar1150._24_4_ = 0x42b0c0a5;
          auVar1150._28_4_ = 0x42b0c0a5;
          auVar1210._8_4_ = 0xc2b0c0a5;
          auVar1210._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar1210._12_4_ = 0xc2b0c0a5;
          auVar1210._16_4_ = 0xc2b0c0a5;
          auVar1210._20_4_ = 0xc2b0c0a5;
          auVar1210._24_4_ = 0xc2b0c0a5;
          auVar1210._28_4_ = 0xc2b0c0a5;
          auVar1274._8_4_ = 0x3f000000;
          auVar1274._0_8_ = 0x3f0000003f000000;
          auVar1274._12_4_ = 0x3f000000;
          auVar1274._16_4_ = 0x3f000000;
          auVar1274._20_4_ = 0x3f000000;
          auVar1274._24_4_ = 0x3f000000;
          auVar1274._28_4_ = 0x3f000000;
          auVar1335._8_4_ = 0x3fb8aa3b;
          auVar1335._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar1335._12_4_ = 0x3fb8aa3b;
          auVar1335._16_4_ = 0x3fb8aa3b;
          auVar1335._20_4_ = 0x3fb8aa3b;
          auVar1335._24_4_ = 0x3fb8aa3b;
          auVar1335._28_4_ = 0x3fb8aa3b;
          auVar1391._8_4_ = 0x3f318000;
          auVar1391._0_8_ = 0x3f3180003f318000;
          auVar1391._12_4_ = 0x3f318000;
          auVar1391._16_4_ = 0x3f318000;
          auVar1391._20_4_ = 0x3f318000;
          auVar1391._24_4_ = 0x3f318000;
          auVar1391._28_4_ = 0x3f318000;
          auVar1447._8_4_ = 0x395e8083;
          auVar1447._0_8_ = 0x395e8083395e8083;
          auVar1447._12_4_ = 0x395e8083;
          auVar1447._16_4_ = 0x395e8083;
          auVar1447._20_4_ = 0x395e8083;
          auVar1447._24_4_ = 0x395e8083;
          auVar1447._28_4_ = 0x395e8083;
          auVar1501._8_4_ = 0x39506967;
          auVar1501._0_8_ = 0x3950696739506967;
          auVar1501._12_4_ = 0x39506967;
          auVar1501._16_4_ = 0x39506967;
          auVar1501._20_4_ = 0x39506967;
          auVar1501._24_4_ = 0x39506967;
          auVar1501._28_4_ = 0x39506967;
          auVar1555._8_4_ = 0x3ab743ce;
          auVar1555._0_8_ = 0x3ab743ce3ab743ce;
          auVar1555._12_4_ = 0x3ab743ce;
          auVar1555._16_4_ = 0x3ab743ce;
          auVar1555._20_4_ = 0x3ab743ce;
          auVar1555._24_4_ = 0x3ab743ce;
          auVar1555._28_4_ = 0x3ab743ce;
          auVar1609._8_4_ = 0x3c088908;
          auVar1609._0_8_ = 0x3c0889083c088908;
          auVar1609._12_4_ = 0x3c088908;
          auVar1609._16_4_ = 0x3c088908;
          auVar1609._20_4_ = 0x3c088908;
          auVar1609._24_4_ = 0x3c088908;
          auVar1609._28_4_ = 0x3c088908;
          auVar1663._8_4_ = 0x3d2aa9c1;
          auVar1663._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar1663._12_4_ = 0x3d2aa9c1;
          auVar1663._16_4_ = 0x3d2aa9c1;
          auVar1663._20_4_ = 0x3d2aa9c1;
          auVar1663._24_4_ = 0x3d2aa9c1;
          auVar1663._28_4_ = 0x3d2aa9c1;
          auVar1717._8_4_ = 0x3e2aaaaa;
          auVar1717._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar1717._12_4_ = 0x3e2aaaaa;
          auVar1717._16_4_ = 0x3e2aaaaa;
          auVar1717._20_4_ = 0x3e2aaaaa;
          auVar1717._24_4_ = 0x3e2aaaaa;
          auVar1717._28_4_ = 0x3e2aaaaa;
          auVar1767._8_4_ = 0x3f800000;
          auVar1767._0_8_ = 0x3f8000003f800000;
          auVar1767._12_4_ = 0x3f800000;
          auVar1767._16_4_ = 0x3f800000;
          auVar1767._20_4_ = 0x3f800000;
          auVar1767._24_4_ = 0x3f800000;
          auVar1767._28_4_ = 0x3f800000;
          uVar882 = uVar425;
          do {
            auVar1822._0_4_ =
                 (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar677._0_4_) *
                 *(float *)*(undefined1 (*) [64])ptr;
            auVar1822._4_4_ =
                 (float)((uint)bVar13 * auVar674._4_4_ | (uint)!bVar13 * auVar677._4_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 4);
            auVar1822._8_4_ =
                 (float)((uint)bVar14 * auVar674._8_4_ | (uint)!bVar14 * auVar677._8_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 8);
            auVar1822._12_4_ =
                 (float)((uint)bVar15 * auVar674._12_4_ | (uint)!bVar15 * auVar677._12_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            auVar1822._16_4_ =
                 (float)((uint)bVar16 * auVar674._16_4_ | (uint)!bVar16 * auVar677._16_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x10);
            auVar1822._20_4_ =
                 (float)((uint)bVar17 * auVar674._20_4_ | (uint)!bVar17 * auVar677._20_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x14);
            auVar1822._28_36_ = in_ZMM15._28_36_;
            auVar1822._24_4_ =
                 (float)((uint)bVar18 * auVar674._24_4_ | (uint)!bVar18 * auVar677._24_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x18);
            auVar678 = vminps_avx(auVar1822._0_32_,auVar1150);
            auVar678 = vmaxps_avx(auVar678,auVar1210);
            auVar562 = vfmadd231ps_avx512vl(auVar1274,auVar678,auVar1335);
            auVar679 = vrndscaleps_avx512vl(auVar562,1);
            uVar47 = vcmpps_avx512vl(auVar562,auVar679,1);
            auVar562 = vaddps_avx512vl(auVar679,auVar1084);
            bVar19 = (bool)((byte)uVar47 & 1);
            auVar689._0_4_ = (uint)bVar19 * auVar562._0_4_ | (uint)!bVar19 * auVar679._0_4_;
            bVar19 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar689._4_4_ = (uint)bVar19 * auVar562._4_4_ | (uint)!bVar19 * auVar679._4_4_;
            bVar19 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar689._8_4_ = (uint)bVar19 * auVar562._8_4_ | (uint)!bVar19 * auVar679._8_4_;
            bVar19 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar689._12_4_ = (uint)bVar19 * auVar562._12_4_ | (uint)!bVar19 * auVar679._12_4_;
            bVar19 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar689._16_4_ = (uint)bVar19 * auVar562._16_4_ | (uint)!bVar19 * auVar679._16_4_;
            bVar19 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar689._20_4_ = (uint)bVar19 * auVar562._20_4_ | (uint)!bVar19 * auVar679._20_4_;
            bVar19 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar689._24_4_ = (uint)bVar19 * auVar562._24_4_ | (uint)!bVar19 * auVar679._24_4_;
            bVar19 = SUB81(uVar47 >> 7,0);
            auVar689._28_4_ = (uint)bVar19 * auVar562._28_4_ | (uint)!bVar19 * auVar679._28_4_;
            auVar678 = vfmsub231ps_avx512vl(auVar678,auVar689,auVar1391);
            auVar678 = vfmsub231ps_avx512vl(auVar678,auVar689,auVar1447);
            auVar562 = vfmadd213ps_avx512vl(auVar1501,auVar678,auVar1555);
            auVar679 = vmulps_avx512vl(auVar678,auVar678);
            auVar562 = vfmadd213ps_avx512vl(auVar562,auVar678,auVar1609);
            auVar562 = vfmadd213ps_avx512vl(auVar562,auVar678,auVar1663);
            auVar562 = vfmadd213ps_avx512vl(auVar562,auVar678,auVar1717);
            auVar562 = vfmadd213ps_avx512vl(auVar562,auVar678,auVar1274);
            auVar562 = vfmadd213ps_avx512vl(auVar562,auVar679,auVar678);
            auVar678 = vcvttps2dq_avx512vl(auVar689);
            auVar678 = vpslld_avx2(auVar678,0x17);
            auVar678 = vpaddd_avx2(auVar678,auVar1767);
            auVar678 = vfmadd213ps_avx512vl(auVar678,auVar562,auVar678);
            in_ZMM15 = (float  [16])ZEXT3264(auVar678);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar678;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)(uVar425 | 3) < (int)uVar427) {
          auVar75._8_4_ = 0x800000;
          auVar75._0_8_ = 0x80000000800000;
          auVar75._12_4_ = 0x800000;
          auVar442 = vmaxps_avx512vl(auVar892,auVar75);
          auVar461 = vpsrld_avx(auVar442,0x17);
          auVar1115._8_4_ = 0x3f000000;
          auVar1115._0_8_ = 0x3f0000003f000000;
          auVar1115._12_4_ = 0x3f000000;
          auVar76._8_4_ = 0x807fffff;
          auVar76._0_8_ = 0x807fffff807fffff;
          auVar76._12_4_ = 0x807fffff;
          auVar460 = vpternlogd_avx512vl(auVar1115,auVar442,auVar76,0xf8);
          auVar77._8_4_ = 0xffffff82;
          auVar77._0_8_ = 0xffffff82ffffff82;
          auVar77._12_4_ = 0xffffff82;
          auVar442 = vpaddd_avx512vl(auVar461,auVar77);
          auVar442 = vcvtdq2ps_avx(auVar442);
          auVar78._8_4_ = 0x3f3504f3;
          auVar78._0_8_ = 0x3f3504f33f3504f3;
          auVar78._12_4_ = 0x3f3504f3;
          uVar47 = vcmpps_avx512vl(auVar460,auVar78,1);
          auVar943._8_4_ = 0xbf800000;
          auVar943._0_8_ = 0xbf800000bf800000;
          auVar943._12_4_ = 0xbf800000;
          auVar1221._0_4_ = auVar460._0_4_ + -1.0;
          auVar1221._4_4_ = auVar460._4_4_ + -1.0;
          auVar1221._8_4_ = auVar460._8_4_ + -1.0;
          auVar1221._12_4_ = auVar460._12_4_ + -1.0;
          auVar461 = vaddps_avx512vl(auVar442,auVar943);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar473._0_4_ = (uint)bVar12 * auVar461._0_4_ | (uint)!bVar12 * auVar442._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar473._4_4_ = (uint)bVar12 * auVar461._4_4_ | (uint)!bVar12 * auVar442._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar473._8_4_ = (uint)bVar12 * auVar461._8_4_ | (uint)!bVar12 * auVar442._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar473._12_4_ = (uint)bVar12 * auVar461._12_4_ | (uint)!bVar12 * auVar442._12_4_;
          auVar442 = vaddps_avx512vl(auVar1221,auVar460);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar474._0_4_ =
               (float)((uint)bVar12 * auVar442._0_4_ | (uint)!bVar12 * (int)auVar1221._0_4_);
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar474._4_4_ =
               (float)((uint)bVar12 * auVar442._4_4_ | (uint)!bVar12 * (int)auVar1221._4_4_);
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar474._8_4_ =
               (float)((uint)bVar12 * auVar442._8_4_ | (uint)!bVar12 * (int)auVar1221._8_4_);
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar474._12_4_ =
               (float)((uint)bVar12 * auVar442._12_4_ | (uint)!bVar12 * (int)auVar1221._12_4_);
          auVar1116._0_4_ = auVar474._0_4_ * auVar474._0_4_;
          auVar1116._4_4_ = auVar474._4_4_ * auVar474._4_4_;
          auVar1116._8_4_ = auVar474._8_4_ * auVar474._8_4_;
          auVar1116._12_4_ = auVar474._12_4_ * auVar474._12_4_;
          auVar1285._8_4_ = 0x3d9021bb;
          auVar1285._0_8_ = 0x3d9021bb3d9021bb;
          auVar1285._12_4_ = 0x3d9021bb;
          auVar79._8_4_ = 0xbdebd1b8;
          auVar79._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar79._12_4_ = 0xbdebd1b8;
          auVar442 = vfmadd213ps_avx512vl(auVar1285,auVar474,auVar79);
          auVar80._8_4_ = 0x3def251a;
          auVar80._0_8_ = 0x3def251a3def251a;
          auVar80._12_4_ = 0x3def251a;
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar474,auVar80);
          auVar81._8_4_ = 0xbdfe5d4f;
          auVar81._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar81._12_4_ = 0xbdfe5d4f;
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar474,auVar81);
          auVar82._8_4_ = 0x3e11e9bf;
          auVar82._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar82._12_4_ = 0x3e11e9bf;
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar474,auVar82);
          auVar83._8_4_ = 0xbe2aae50;
          auVar83._0_8_ = 0xbe2aae50be2aae50;
          auVar83._12_4_ = 0xbe2aae50;
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar474,auVar83);
          auVar84._8_4_ = 0x3e4cceac;
          auVar84._0_8_ = 0x3e4cceac3e4cceac;
          auVar84._12_4_ = 0x3e4cceac;
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar474,auVar84);
          auVar85._8_4_ = 0xbe7ffffc;
          auVar85._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar85._12_4_ = 0xbe7ffffc;
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar474,auVar85);
          auVar86._8_4_ = 0x3eaaaaaa;
          auVar86._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar86._12_4_ = 0x3eaaaaaa;
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar474,auVar86);
          auVar1286._0_4_ = auVar1116._0_4_ * auVar474._0_4_ * auVar442._0_4_;
          auVar1286._4_4_ = auVar1116._4_4_ * auVar474._4_4_ * auVar442._4_4_;
          auVar1286._8_4_ = auVar1116._8_4_ * auVar474._8_4_ * auVar442._8_4_;
          auVar1286._12_4_ = auVar1116._12_4_ * auVar474._12_4_ * auVar442._12_4_;
          auVar87._8_4_ = 0xb95e8083;
          auVar87._0_8_ = 0xb95e8083b95e8083;
          auVar87._12_4_ = 0xb95e8083;
          auVar442 = vfmadd231ps_avx512vl(auVar1286,auVar473,auVar87);
          uVar47 = vcmpps_avx512vl(auVar892,(undefined1  [16])0x0,2);
          auVar88._8_4_ = 0x3f000000;
          auVar88._0_8_ = 0x3f0000003f000000;
          auVar88._12_4_ = 0x3f000000;
          auVar442 = vfmsub231ps_avx512vl(auVar442,auVar1116,auVar88);
          auVar442 = vsubps_avx(auVar442,auVar474);
          auVar89._8_4_ = 0x3f318000;
          auVar89._0_8_ = 0x3f3180003f318000;
          auVar89._12_4_ = 0x3f318000;
          auVar460 = vfmsub231ps_avx512vl(auVar442,auVar473,auVar89);
          auVar442 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          bVar12 = (bool)((byte)uVar47 & 1);
          bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar1032._8_4_ = 0x42b0c0a5;
          auVar1032._0_8_ = 0x42b0c0a542b0c0a5;
          auVar1032._12_4_ = 0x42b0c0a5;
          auVar1117._8_4_ = 0xc2b0c0a5;
          auVar1117._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar1117._12_4_ = 0xc2b0c0a5;
          auVar1167._8_4_ = 0x3f000000;
          auVar1167._0_8_ = 0x3f0000003f000000;
          auVar1167._12_4_ = 0x3f000000;
          auVar1222._8_4_ = 0x3fb8aa3b;
          auVar1222._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar1222._12_4_ = 0x3fb8aa3b;
          auVar1287._8_4_ = 0x3f318000;
          auVar1287._0_8_ = 0x3f3180003f318000;
          auVar1287._12_4_ = 0x3f318000;
          auVar1348._8_4_ = 0x395e8083;
          auVar1348._0_8_ = 0x395e8083395e8083;
          auVar1348._12_4_ = 0x395e8083;
          auVar1404._8_4_ = 0x39506967;
          auVar1404._0_8_ = 0x3950696739506967;
          auVar1404._12_4_ = 0x39506967;
          auVar1458._8_4_ = 0x3ab743ce;
          auVar1458._0_8_ = 0x3ab743ce3ab743ce;
          auVar1458._12_4_ = 0x3ab743ce;
          auVar1512._8_4_ = 0x3c088908;
          auVar1512._0_8_ = 0x3c0889083c088908;
          auVar1512._12_4_ = 0x3c088908;
          auVar1566._8_4_ = 0x3d2aa9c1;
          auVar1566._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar1566._12_4_ = 0x3d2aa9c1;
          auVar1620._8_4_ = 0x3e2aaaaa;
          auVar1620._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar1620._12_4_ = 0x3e2aaaaa;
          auVar1674._8_4_ = 0x3f800000;
          auVar1674._0_8_ = 0x3f8000003f800000;
          auVar1674._12_4_ = 0x3f800000;
          uVar882 = uVar425;
          do {
            auVar1728._0_4_ =
                 (float)((uint)bVar12 * auVar442._0_4_ | (uint)!bVar12 * auVar460._0_4_) *
                 *(float *)*(undefined1 (*) [64])ptr;
            auVar1728._4_4_ =
                 (float)((uint)bVar13 * auVar442._4_4_ | (uint)!bVar13 * auVar460._4_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 4);
            auVar1728._8_4_ =
                 (float)((uint)bVar14 * auVar442._8_4_ | (uint)!bVar14 * auVar460._8_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 8);
            auVar1728._12_4_ =
                 (float)((uint)bVar15 * auVar442._12_4_ | (uint)!bVar15 * auVar460._12_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            auVar461 = vminps_avx(auVar1728,auVar1032);
            auVar461 = vmaxps_avx(auVar461,auVar1117);
            auVar519 = vfmadd231ps_fma(auVar1167,auVar461,auVar1222);
            auVar472 = vcvttps2dq_avx512vl(auVar519);
            auVar472 = vcvtdq2ps_avx512vl(auVar472);
            uVar47 = vcmpps_avx512vl(auVar519,auVar472,1);
            auVar519 = vaddps_avx512vl(auVar472,auVar943);
            bVar16 = (bool)((byte)uVar47 & 1);
            auVar475._0_4_ = (uint)bVar16 * auVar519._0_4_ | (uint)!bVar16 * auVar472._0_4_;
            bVar16 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar475._4_4_ = (uint)bVar16 * auVar519._4_4_ | (uint)!bVar16 * auVar472._4_4_;
            bVar16 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar475._8_4_ = (uint)bVar16 * auVar519._8_4_ | (uint)!bVar16 * auVar472._8_4_;
            bVar16 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar475._12_4_ = (uint)bVar16 * auVar519._12_4_ | (uint)!bVar16 * auVar472._12_4_;
            auVar461 = vfmsub231ps_avx512vl(auVar461,auVar475,auVar1287);
            auVar519 = vfmsub231ps_avx512vl(auVar461,auVar475,auVar1348);
            auVar461 = vfmadd213ps_fma(auVar1404,auVar519,auVar1458);
            auVar472 = vmulps_avx512vl(auVar519,auVar519);
            auVar461 = vfmadd213ps_fma(auVar461,auVar519,auVar1512);
            auVar461 = vfmadd213ps_fma(auVar461,auVar519,auVar1566);
            auVar461 = vfmadd213ps_fma(auVar461,auVar519,auVar1620);
            auVar461 = vfmadd213ps_fma(auVar461,auVar519,auVar1167);
            auVar519 = vfmadd213ps_avx512vl(auVar461,auVar472,auVar519);
            auVar461 = vcvttps2dq_avx512vl(auVar475);
            auVar461 = vpslld_avx(auVar461,0x17);
            auVar461 = vpaddd_avx(auVar461,auVar1674);
            auVar461 = vfmadd213ps_fma(auVar461,auVar519,auVar461);
            *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar461;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
            uVar425 = uVar882 + 4;
            iVar424 = uVar882 + 7;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          return;
        }
        lVar428 = 0;
        do {
          fVar891 = powf(fVar890,*(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4));
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = fVar891;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (aw == 1) {
        fVar890 = *ptr;
        if (iVar424 == 4) {
          auVar964 = *(undefined1 (*) [16])ptr;
        }
        else {
          auVar964._4_4_ = fVar890;
          auVar964._0_4_ = fVar890;
          auVar964._8_4_ = fVar890;
          auVar964._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1097 = *(undefined1 (*) [32])ptr;
        }
        else {
          auVar1097._16_16_ = auVar964;
          auVar1097._0_16_ = auVar964;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1097),auVar1097,1);
        }
        uVar425 = 0;
        auVar442 = ZEXT416((uint)fVar890);
        auVar674 = ZEXT1632(auVar964);
        if (0xf < (int)uVar427) {
          auVar716 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar717 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar718 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar719 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
          auVar720 = vpxord_avx512f(auVar716,auVar718);
          auVar721 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
          auVar460 = auVar721._0_16_;
          auVar722 = vpxord_avx512f(auVar721,auVar718);
          auVar723 = vpxord_avx512f(auVar719,auVar718);
          iVar424 = 0xf;
          auVar442 = vxorps_avx512vl(auVar466,auVar466);
          auVar718 = vpternlogd_avx512f(auVar718,auVar718,auVar718,0xff);
          do {
            auVar724 = vmaxps_avx512f(*(undefined1 (*) [64])ptr1,
                                      (undefined1  [64])_ps512_min_norm_pos);
            auVar725 = vpsrld_avx512f(auVar724,0x17);
            auVar724 = vpternlogd_avx512f(auVar724,auVar716,(undefined1  [64])_ps512_inv_mant_mask,
                                          0xec);
            uVar47 = vcmpps_avx512f(auVar724,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar726 = vsubps_avx512f(auVar724,(undefined1  [64])afVar407);
            auVar724 = vaddps_avx512f(auVar726,auVar724);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar870._0_4_ = (uint)bVar12 * auVar724._0_4_ | (uint)!bVar12 * auVar726._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar870._4_4_ = (uint)bVar12 * auVar724._4_4_ | (uint)!bVar12 * auVar726._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar870._8_4_ = (uint)bVar12 * auVar724._8_4_ | (uint)!bVar12 * auVar726._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar870._12_4_ = (uint)bVar12 * auVar724._12_4_ | (uint)!bVar12 * auVar726._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar870._16_4_ = (uint)bVar12 * auVar724._16_4_ | (uint)!bVar12 * auVar726._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar870._20_4_ = (uint)bVar12 * auVar724._20_4_ | (uint)!bVar12 * auVar726._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar870._24_4_ = (uint)bVar12 * auVar724._24_4_ | (uint)!bVar12 * auVar726._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar870._28_4_ = (uint)bVar12 * auVar724._28_4_ | (uint)!bVar12 * auVar726._28_4_;
            bVar29 = (byte)(uVar47 >> 8);
            bVar12 = (bool)(bVar29 & 1);
            auVar870._32_4_ = (uint)bVar12 * auVar724._32_4_ | (uint)!bVar12 * auVar726._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar870._36_4_ = (uint)bVar12 * auVar724._36_4_ | (uint)!bVar12 * auVar726._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar870._40_4_ = (uint)bVar12 * auVar724._40_4_ | (uint)!bVar12 * auVar726._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar870._44_4_ = (uint)bVar12 * auVar724._44_4_ | (uint)!bVar12 * auVar726._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar870._48_4_ = (uint)bVar12 * auVar724._48_4_ | (uint)!bVar12 * auVar726._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar870._52_4_ = (uint)bVar12 * auVar724._52_4_ | (uint)!bVar12 * auVar726._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar870._56_4_ = (uint)bVar12 * auVar724._56_4_ | (uint)!bVar12 * auVar726._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar870._60_4_ = (uint)bVar12 * auVar724._60_4_ | (uint)!bVar12 * auVar726._60_4_;
            auVar724 = vfmadd132ps_avx512f(auVar870,(undefined1  [64])_ps512_cephes_log_p1,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar724 = vfmadd213ps_avx512f(auVar724,auVar870,(undefined1  [64])afVar417);
            auVar724 = vfmadd213ps_avx512f(auVar724,auVar870,(undefined1  [64])afVar418);
            auVar726 = vmulps_avx512f(auVar870,auVar870);
            auVar724 = vfmadd213ps_avx512f(auVar724,auVar870,(undefined1  [64])afVar419);
            auVar724 = vfmadd213ps_avx512f(auVar724,auVar870,(undefined1  [64])afVar420);
            auVar724 = vfmadd213ps_avx512f(auVar724,auVar870,(undefined1  [64])afVar421);
            auVar724 = vfmadd213ps_avx512f(auVar724,auVar870,(undefined1  [64])afVar422);
            auVar724 = vfmadd213ps_avx512f(auVar724,auVar870,(undefined1  [64])afVar423);
            auVar727 = vmulps_avx512f(auVar726,auVar870);
            auVar724 = vfmadd213ps_avx512f(auVar727,auVar724,auVar870);
            auVar725 = vpsubd_avx512f(auVar725,auVar717);
            auVar725 = vcvtdq2ps_avx512f(auVar725);
            auVar727 = vaddps_avx512f(auVar725,(undefined1  [64])afVar407);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar871._0_4_ = (uint)bVar12 * auVar725._0_4_ | (uint)!bVar12 * auVar727._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar871._4_4_ = (uint)bVar12 * auVar725._4_4_ | (uint)!bVar12 * auVar727._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar871._8_4_ = (uint)bVar12 * auVar725._8_4_ | (uint)!bVar12 * auVar727._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar871._12_4_ = (uint)bVar12 * auVar725._12_4_ | (uint)!bVar12 * auVar727._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar871._16_4_ = (uint)bVar12 * auVar725._16_4_ | (uint)!bVar12 * auVar727._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar871._20_4_ = (uint)bVar12 * auVar725._20_4_ | (uint)!bVar12 * auVar727._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar871._24_4_ = (uint)bVar12 * auVar725._24_4_ | (uint)!bVar12 * auVar727._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar871._28_4_ = (uint)bVar12 * auVar725._28_4_ | (uint)!bVar12 * auVar727._28_4_;
            bVar12 = (bool)(bVar29 & 1);
            auVar871._32_4_ = (uint)bVar12 * auVar725._32_4_ | (uint)!bVar12 * auVar727._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar871._36_4_ = (uint)bVar12 * auVar725._36_4_ | (uint)!bVar12 * auVar727._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar871._40_4_ = (uint)bVar12 * auVar725._40_4_ | (uint)!bVar12 * auVar727._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar871._44_4_ = (uint)bVar12 * auVar725._44_4_ | (uint)!bVar12 * auVar727._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar871._48_4_ = (uint)bVar12 * auVar725._48_4_ | (uint)!bVar12 * auVar727._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar871._52_4_ = (uint)bVar12 * auVar725._52_4_ | (uint)!bVar12 * auVar727._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar871._56_4_ = (uint)bVar12 * auVar725._56_4_ | (uint)!bVar12 * auVar727._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar871._60_4_ = (uint)bVar12 * auVar725._60_4_ | (uint)!bVar12 * auVar727._60_4_;
            uVar47 = vcmpps_avx512f(*(undefined1 (*) [64])ptr1,ZEXT1664(auVar442),2);
            auVar724 = vfmadd231ps_avx512f(auVar724,auVar871,auVar719);
            auVar724 = vfmadd231ps_avx512f(auVar724,auVar720,auVar726);
            auVar724 = vfmadd231ps_avx512f(auVar724,auVar721,auVar871);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar872._0_4_ = (uint)bVar12 * auVar718._0_4_ | (uint)!bVar12 * auVar724._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar872._4_4_ = (uint)bVar12 * auVar718._4_4_ | (uint)!bVar12 * auVar724._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar872._8_4_ = (uint)bVar12 * auVar718._8_4_ | (uint)!bVar12 * auVar724._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar872._12_4_ = (uint)bVar12 * auVar718._12_4_ | (uint)!bVar12 * auVar724._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar872._16_4_ = (uint)bVar12 * auVar718._16_4_ | (uint)!bVar12 * auVar724._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar872._20_4_ = (uint)bVar12 * auVar718._20_4_ | (uint)!bVar12 * auVar724._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar872._24_4_ = (uint)bVar12 * auVar718._24_4_ | (uint)!bVar12 * auVar724._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar872._28_4_ = (uint)bVar12 * auVar718._28_4_ | (uint)!bVar12 * auVar724._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            auVar872._32_4_ = (uint)bVar12 * auVar718._32_4_ | (uint)!bVar12 * auVar724._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar872._36_4_ = (uint)bVar12 * auVar718._36_4_ | (uint)!bVar12 * auVar724._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar872._40_4_ = (uint)bVar12 * auVar718._40_4_ | (uint)!bVar12 * auVar724._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar872._44_4_ = (uint)bVar12 * auVar718._44_4_ | (uint)!bVar12 * auVar724._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar872._48_4_ = (uint)bVar12 * auVar718._48_4_ | (uint)!bVar12 * auVar724._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar872._52_4_ = (uint)bVar12 * auVar718._52_4_ | (uint)!bVar12 * auVar724._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar872._56_4_ = (uint)bVar12 * auVar718._56_4_ | (uint)!bVar12 * auVar724._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar872._60_4_ = (uint)bVar12 * auVar718._60_4_ | (uint)!bVar12 * auVar724._60_4_;
            auVar724 = vmulps_avx512f(auVar872,auVar734);
            auVar724 = vminps_avx512f(auVar724,(undefined1  [64])afVar408);
            auVar724 = vmaxps_avx512f(auVar724,(undefined1  [64])afVar409);
            auVar725 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar724,auVar716);
            auVar726 = vrndscaleps_avx512f(auVar725,1);
            uVar47 = vcmpps_avx512f(auVar725,auVar726,1);
            auVar725 = vsubps_avx512f(auVar726,(undefined1  [64])afVar407);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar873._0_4_ = (uint)bVar12 * auVar725._0_4_ | (uint)!bVar12 * auVar726._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar873._4_4_ = (uint)bVar12 * auVar725._4_4_ | (uint)!bVar12 * auVar726._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar873._8_4_ = (uint)bVar12 * auVar725._8_4_ | (uint)!bVar12 * auVar726._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar873._12_4_ = (uint)bVar12 * auVar725._12_4_ | (uint)!bVar12 * auVar726._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar873._16_4_ = (uint)bVar12 * auVar725._16_4_ | (uint)!bVar12 * auVar726._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar873._20_4_ = (uint)bVar12 * auVar725._20_4_ | (uint)!bVar12 * auVar726._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar873._24_4_ = (uint)bVar12 * auVar725._24_4_ | (uint)!bVar12 * auVar726._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar873._28_4_ = (uint)bVar12 * auVar725._28_4_ | (uint)!bVar12 * auVar726._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            auVar873._32_4_ = (uint)bVar12 * auVar725._32_4_ | (uint)!bVar12 * auVar726._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar873._36_4_ = (uint)bVar12 * auVar725._36_4_ | (uint)!bVar12 * auVar726._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar873._40_4_ = (uint)bVar12 * auVar725._40_4_ | (uint)!bVar12 * auVar726._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar873._44_4_ = (uint)bVar12 * auVar725._44_4_ | (uint)!bVar12 * auVar726._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar873._48_4_ = (uint)bVar12 * auVar725._48_4_ | (uint)!bVar12 * auVar726._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar873._52_4_ = (uint)bVar12 * auVar725._52_4_ | (uint)!bVar12 * auVar726._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar873._56_4_ = (uint)bVar12 * auVar725._56_4_ | (uint)!bVar12 * auVar726._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar873._60_4_ = (uint)bVar12 * auVar725._60_4_ | (uint)!bVar12 * auVar726._60_4_;
            auVar724 = vfmadd231ps_avx512f(auVar724,auVar873,auVar722);
            auVar724 = vfmadd231ps_avx512f(auVar724,auVar873,auVar723);
            auVar725 = vfmadd213ps_avx512f(auVar724,(undefined1  [64])afVar411,
                                           (undefined1  [64])afVar412);
            auVar725 = vfmadd213ps_avx512f(auVar725,auVar724,(undefined1  [64])afVar413);
            auVar725 = vfmadd213ps_avx512f(auVar725,auVar724,(undefined1  [64])afVar414);
            auVar725 = vfmadd213ps_avx512f(auVar725,auVar724,(undefined1  [64])afVar415);
            auVar726 = vmulps_avx512f(auVar724,auVar724);
            auVar725 = vfmadd213ps_avx512f(auVar725,auVar724,auVar716);
            auVar724 = vfmadd213ps_avx512f(auVar725,auVar726,auVar724);
            auVar725 = vcvttps2dq_avx512f(auVar873);
            in_ZMM5 = vaddps_avx512f(auVar724,(undefined1  [64])afVar407);
            auVar724 = vpaddd_avx512f(auVar725,auVar717);
            auVar724 = vpslld_avx512f(auVar724,0x17);
            in_ZMM4 = vmulps_avx512f(in_ZMM5,auVar724);
            *(undefined1 (*) [64])outptr = in_ZMM4;
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
          auVar442 = auVar461;
          auVar674 = auVar677;
        }
        if ((int)(uVar425 | 7) < (int)uVar427) {
          auVar1395._8_4_ = 0xbf800000;
          auVar1395._0_8_ = 0xbf800000bf800000;
          auVar1395._12_4_ = 0xbf800000;
          auVar1395._16_4_ = 0xbf800000;
          auVar1395._20_4_ = 0xbf800000;
          auVar1395._24_4_ = 0xbf800000;
          auVar1395._28_4_ = 0xbf800000;
          auVar1451._8_4_ = 0x3f800000;
          auVar1451._0_8_ = 0x3f8000003f800000;
          auVar1451._12_4_ = 0x3f800000;
          auVar1451._16_4_ = 0x3f800000;
          auVar1451._20_4_ = 0x3f800000;
          auVar1451._24_4_ = 0x3f800000;
          auVar1451._28_4_ = 0x3f800000;
          auVar1505._8_4_ = 0x3d9021bb;
          auVar1505._0_8_ = 0x3d9021bb3d9021bb;
          auVar1505._12_4_ = 0x3d9021bb;
          auVar1505._16_4_ = 0x3d9021bb;
          auVar1505._20_4_ = 0x3d9021bb;
          auVar1505._24_4_ = 0x3d9021bb;
          auVar1505._28_4_ = 0x3d9021bb;
          auVar1559._8_4_ = 0xbdebd1b8;
          auVar1559._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar1559._12_4_ = 0xbdebd1b8;
          auVar1559._16_4_ = 0xbdebd1b8;
          auVar1559._20_4_ = 0xbdebd1b8;
          auVar1559._24_4_ = 0xbdebd1b8;
          auVar1559._28_4_ = 0xbdebd1b8;
          auVar1613._8_4_ = 0x3def251a;
          auVar1613._0_8_ = 0x3def251a3def251a;
          auVar1613._12_4_ = 0x3def251a;
          auVar1613._16_4_ = 0x3def251a;
          auVar1613._20_4_ = 0x3def251a;
          auVar1613._24_4_ = 0x3def251a;
          auVar1613._28_4_ = 0x3def251a;
          auVar1667._8_4_ = 0xbdfe5d4f;
          auVar1667._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar1667._12_4_ = 0xbdfe5d4f;
          auVar1667._16_4_ = 0xbdfe5d4f;
          auVar1667._20_4_ = 0xbdfe5d4f;
          auVar1667._24_4_ = 0xbdfe5d4f;
          auVar1667._28_4_ = 0xbdfe5d4f;
          auVar1721._8_4_ = 0x3e11e9bf;
          auVar1721._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar1721._12_4_ = 0x3e11e9bf;
          auVar1721._16_4_ = 0x3e11e9bf;
          auVar1721._20_4_ = 0x3e11e9bf;
          auVar1721._24_4_ = 0x3e11e9bf;
          auVar1721._28_4_ = 0x3e11e9bf;
          auVar1771._8_4_ = 0xbe2aae50;
          auVar1771._0_8_ = 0xbe2aae50be2aae50;
          auVar1771._12_4_ = 0xbe2aae50;
          auVar1771._16_4_ = 0xbe2aae50;
          auVar1771._20_4_ = 0xbe2aae50;
          auVar1771._24_4_ = 0xbe2aae50;
          auVar1771._28_4_ = 0xbe2aae50;
          auVar1820._8_4_ = 0x3e4cceac;
          auVar1820._0_8_ = 0x3e4cceac3e4cceac;
          auVar1820._12_4_ = 0x3e4cceac;
          auVar1820._16_4_ = 0x3e4cceac;
          auVar1820._20_4_ = 0x3e4cceac;
          auVar1820._24_4_ = 0x3e4cceac;
          auVar1820._28_4_ = 0x3e4cceac;
          auVar677 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar678 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar562 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar679 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar680 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar460 = auVar680._0_16_;
          auVar442 = ZEXT816(0) << 0x40;
          auVar674 = vpcmpeqd_avx2(auVar674,auVar674);
          auVar683 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar684 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar685 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar701 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar565 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar566 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar567 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar568 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar569 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          uVar882 = uVar425;
          do {
            auVar220._8_4_ = 0x800000;
            auVar220._0_8_ = 0x80000000800000;
            auVar220._12_4_ = 0x800000;
            auVar220._16_4_ = 0x800000;
            auVar220._20_4_ = 0x800000;
            auVar220._24_4_ = 0x800000;
            auVar220._28_4_ = 0x800000;
            auVar570 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1,auVar220);
            auVar563 = vpsrld_avx512vl(auVar570,0x17);
            auVar1155._8_4_ = 0x807fffff;
            auVar1155._0_8_ = 0x807fffff807fffff;
            auVar1155._12_4_ = 0x807fffff;
            auVar1155._16_4_ = 0x807fffff;
            auVar1155._20_4_ = 0x807fffff;
            auVar1155._24_4_ = 0x807fffff;
            auVar1155._28_4_ = 0x807fffff;
            auVar221._8_4_ = 0x3f000000;
            auVar221._0_8_ = 0x3f0000003f000000;
            auVar221._12_4_ = 0x3f000000;
            auVar221._16_4_ = 0x3f000000;
            auVar221._20_4_ = 0x3f000000;
            auVar221._24_4_ = 0x3f000000;
            auVar221._28_4_ = 0x3f000000;
            auVar570 = vpternlogd_avx512vl(auVar570,auVar1155,auVar221,0xea);
            auVar222._8_4_ = 0x3f3504f3;
            auVar222._0_8_ = 0x3f3504f33f3504f3;
            auVar222._12_4_ = 0x3f3504f3;
            auVar222._16_4_ = 0x3f3504f3;
            auVar222._20_4_ = 0x3f3504f3;
            auVar222._24_4_ = 0x3f3504f3;
            auVar222._28_4_ = 0x3f3504f3;
            uVar47 = vcmpps_avx512vl(auVar570,auVar222,1);
            auVar556 = vaddps_avx512vl(auVar570,auVar1395);
            auVar570 = vaddps_avx512vl(auVar556,auVar570);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar704._0_4_ = (float)((uint)bVar12 * auVar570._0_4_ | (uint)!bVar12 * auVar556._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar704._4_4_ = (float)((uint)bVar12 * auVar570._4_4_ | (uint)!bVar12 * auVar556._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar704._8_4_ = (float)((uint)bVar12 * auVar570._8_4_ | (uint)!bVar12 * auVar556._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar704._12_4_ =
                 (float)((uint)bVar12 * auVar570._12_4_ | (uint)!bVar12 * auVar556._12_4_);
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar704._16_4_ =
                 (float)((uint)bVar12 * auVar570._16_4_ | (uint)!bVar12 * auVar556._16_4_);
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar704._20_4_ =
                 (float)((uint)bVar12 * auVar570._20_4_ | (uint)!bVar12 * auVar556._20_4_);
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar704._24_4_ =
                 (float)((uint)bVar12 * auVar570._24_4_ | (uint)!bVar12 * auVar556._24_4_);
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar704._28_4_ = (uint)bVar12 * auVar570._28_4_ | (uint)!bVar12 * auVar556._28_4_;
            auVar570 = vfmadd213ps_avx512vl(auVar1505,auVar704,auVar1559);
            auVar570 = vfmadd213ps_avx512vl(auVar570,auVar704,auVar1613);
            auVar570 = vfmadd213ps_avx512vl(auVar570,auVar704,auVar1667);
            auVar570 = vfmadd213ps_avx512vl(auVar570,auVar704,auVar1721);
            auVar1216._0_4_ = auVar704._0_4_ * auVar704._0_4_;
            auVar1216._4_4_ = auVar704._4_4_ * auVar704._4_4_;
            auVar1216._8_4_ = auVar704._8_4_ * auVar704._8_4_;
            auVar1216._12_4_ = auVar704._12_4_ * auVar704._12_4_;
            auVar1216._16_4_ = auVar704._16_4_ * auVar704._16_4_;
            auVar1216._20_4_ = auVar704._20_4_ * auVar704._20_4_;
            auVar1216._28_36_ = in_ZMM4._28_36_;
            auVar1216._24_4_ = auVar704._24_4_ * auVar704._24_4_;
            auVar570 = vfmadd213ps_avx512vl(auVar570,auVar704,auVar1771);
            auVar570 = vfmadd213ps_avx512vl(auVar570,auVar704,auVar1820);
            auVar570 = vfmadd213ps_avx512vl(auVar570,auVar704,auVar677);
            auVar570 = vfmadd213ps_avx512vl(auVar570,auVar704,auVar678);
            auVar1280._0_4_ = auVar1216._0_4_ * auVar704._0_4_;
            auVar1280._4_4_ = auVar1216._4_4_ * auVar704._4_4_;
            auVar1280._8_4_ = auVar1216._8_4_ * auVar704._8_4_;
            auVar1280._12_4_ = auVar1216._12_4_ * auVar704._12_4_;
            auVar1280._16_4_ = auVar1216._16_4_ * auVar704._16_4_;
            auVar1280._20_4_ = auVar1216._20_4_ * auVar704._20_4_;
            auVar1280._28_36_ = in_ZMM5._28_36_;
            auVar1280._24_4_ = auVar1216._24_4_ * auVar704._24_4_;
            auVar556 = vmulps_avx512vl(auVar1280._0_32_,auVar570);
            auVar223._8_4_ = 0xffffff82;
            auVar223._0_8_ = 0xffffff82ffffff82;
            auVar223._12_4_ = 0xffffff82;
            auVar223._16_4_ = 0xffffff82;
            auVar223._20_4_ = 0xffffff82;
            auVar223._24_4_ = 0xffffff82;
            auVar223._28_4_ = 0xffffff82;
            auVar570 = vpaddd_avx512vl(auVar563,auVar223);
            auVar570 = vcvtdq2ps_avx(auVar570);
            auVar563 = vsubps_avx512vl(auVar570,auVar1451);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar705._0_4_ = (uint)bVar12 * auVar563._0_4_ | (uint)!bVar12 * auVar570._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar705._4_4_ = (uint)bVar12 * auVar563._4_4_ | (uint)!bVar12 * auVar570._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar705._8_4_ = (uint)bVar12 * auVar563._8_4_ | (uint)!bVar12 * auVar570._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar705._12_4_ = (uint)bVar12 * auVar563._12_4_ | (uint)!bVar12 * auVar570._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar705._16_4_ = (uint)bVar12 * auVar563._16_4_ | (uint)!bVar12 * auVar570._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar705._20_4_ = (uint)bVar12 * auVar563._20_4_ | (uint)!bVar12 * auVar570._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar705._24_4_ = (uint)bVar12 * auVar563._24_4_ | (uint)!bVar12 * auVar570._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar705._28_4_ = (uint)bVar12 * auVar563._28_4_ | (uint)!bVar12 * auVar570._28_4_;
            auVar570 = vfmadd231ps_avx512vl(auVar556,auVar705,auVar562);
            auVar563 = vfmsub231ps_avx512vl(auVar570,auVar679,auVar1216._0_32_);
            uVar47 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1,
                                     ZEXT1632(auVar442),2);
            auVar570 = vsubps_avx(auVar563,auVar704);
            auVar570 = vfmsub231ps_avx512vl(auVar570,auVar680,auVar705);
            bVar12 = (bool)((byte)uVar47 & 1);
            bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar47 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar47 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar391._4_4_ =
                 (float)((uint)bVar13 * auVar674._4_4_ | (uint)!bVar13 * auVar570._4_4_) *
                 auVar1097._4_4_;
            auVar391._0_4_ =
                 (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar570._0_4_) *
                 auVar1097._0_4_;
            auVar391._8_4_ =
                 (float)((uint)bVar14 * auVar674._8_4_ | (uint)!bVar14 * auVar570._8_4_) *
                 auVar1097._8_4_;
            auVar391._12_4_ =
                 (float)((uint)bVar15 * auVar674._12_4_ | (uint)!bVar15 * auVar570._12_4_) *
                 auVar1097._12_4_;
            auVar391._16_4_ =
                 (float)((uint)bVar16 * auVar674._16_4_ | (uint)!bVar16 * auVar570._16_4_) *
                 auVar1097._16_4_;
            auVar391._20_4_ =
                 (float)((uint)bVar17 * auVar674._20_4_ | (uint)!bVar17 * auVar570._20_4_) *
                 auVar1097._20_4_;
            auVar391._24_4_ =
                 (float)((uint)bVar18 * auVar674._24_4_ | (uint)!bVar18 * auVar570._24_4_) *
                 auVar1097._24_4_;
            auVar391._28_4_ = auVar705._28_4_;
            auVar570 = vminps_avx512vl(auVar391,auVar683);
            auVar556 = vmaxps_avx512vl(auVar570,auVar684);
            auVar559 = vfmadd231ps_avx512vl(auVar679,auVar556,auVar685);
            auVar570 = vroundps_avx(auVar559,1);
            uVar47 = vcmpps_avx512vl(auVar559,auVar570,1);
            auVar559 = vsubps_avx512vl(auVar570,auVar1451);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar706._0_4_ = (float)((uint)bVar12 * auVar559._0_4_ | (uint)!bVar12 * auVar570._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar706._4_4_ = (float)((uint)bVar12 * auVar559._4_4_ | (uint)!bVar12 * auVar570._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar706._8_4_ = (float)((uint)bVar12 * auVar559._8_4_ | (uint)!bVar12 * auVar570._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar706._12_4_ =
                 (float)((uint)bVar12 * auVar559._12_4_ | (uint)!bVar12 * auVar570._12_4_);
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar706._16_4_ =
                 (float)((uint)bVar12 * auVar559._16_4_ | (uint)!bVar12 * auVar570._16_4_);
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar706._20_4_ =
                 (float)((uint)bVar12 * auVar559._20_4_ | (uint)!bVar12 * auVar570._20_4_);
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar706._24_4_ =
                 (float)((uint)bVar12 * auVar559._24_4_ | (uint)!bVar12 * auVar570._24_4_);
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar706._28_4_ =
                 (float)((uint)bVar12 * auVar559._28_4_ | (uint)!bVar12 * auVar570._28_4_);
            in_ZMM4 = ZEXT3264(auVar706);
            auVar570 = vfmsub231ps_avx512vl(auVar556,auVar706,auVar680);
            auVar570 = vfnmsub231ps_avx512vl(auVar570,auVar706,auVar562);
            auVar556 = vfmadd213ps_avx512vl(auVar701,auVar570,auVar565);
            auVar392._4_4_ = auVar570._4_4_ * auVar570._4_4_;
            auVar392._0_4_ = auVar570._0_4_ * auVar570._0_4_;
            auVar392._8_4_ = auVar570._8_4_ * auVar570._8_4_;
            auVar392._12_4_ = auVar570._12_4_ * auVar570._12_4_;
            auVar392._16_4_ = auVar570._16_4_ * auVar570._16_4_;
            auVar392._20_4_ = auVar570._20_4_ * auVar570._20_4_;
            auVar392._24_4_ = auVar570._24_4_ * auVar570._24_4_;
            auVar392._28_4_ = auVar563._28_4_;
            in_ZMM5 = ZEXT3264(auVar392);
            auVar563 = vfmadd213ps_avx512vl(auVar556,auVar570,auVar566);
            auVar563 = vfmadd213ps_avx512vl(auVar563,auVar570,auVar567);
            auVar563 = vfmadd213ps_avx512vl(auVar563,auVar570,auVar568);
            auVar563 = vfmadd213ps_avx512vl(auVar563,auVar570,auVar679);
            auVar461 = vfmadd213ps_fma(auVar563,auVar392,auVar570);
            auVar1098._0_4_ = (int)auVar706._0_4_;
            auVar1098._4_4_ = (int)auVar706._4_4_;
            auVar1098._8_4_ = (int)auVar706._8_4_;
            auVar1098._12_4_ = (int)auVar706._12_4_;
            auVar1098._16_4_ = (int)auVar706._16_4_;
            auVar1098._20_4_ = (int)auVar706._20_4_;
            auVar1098._24_4_ = (int)auVar706._24_4_;
            auVar1098._28_4_ = (int)auVar706._28_4_;
            auVar570 = vpslld_avx2(auVar1098,0x17);
            auVar570 = vpaddd_avx512vl(auVar570,auVar569);
            auVar461 = vfmadd213ps_fma(auVar570,ZEXT1632(auVar461),auVar570);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar461);
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)(uVar425 | 3) < (int)uVar427) {
          auVar1299._8_4_ = 0xbf800000;
          auVar1299._0_8_ = 0xbf800000bf800000;
          auVar1299._12_4_ = 0xbf800000;
          auVar1360._8_4_ = 0x3f800000;
          auVar1360._0_8_ = 0x3f8000003f800000;
          auVar1360._12_4_ = 0x3f800000;
          auVar1416._8_4_ = 0x3d9021bb;
          auVar1416._0_8_ = 0x3d9021bb3d9021bb;
          auVar1416._12_4_ = 0x3d9021bb;
          auVar1470._8_4_ = 0xbdebd1b8;
          auVar1470._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar1470._12_4_ = 0xbdebd1b8;
          auVar1524._8_4_ = 0x3def251a;
          auVar1524._0_8_ = 0x3def251a3def251a;
          auVar1524._12_4_ = 0x3def251a;
          auVar1578._8_4_ = 0xbdfe5d4f;
          auVar1578._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar1578._12_4_ = 0xbdfe5d4f;
          auVar1632._8_4_ = 0x3e11e9bf;
          auVar1632._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar1632._12_4_ = 0x3e11e9bf;
          auVar1686._8_4_ = 0xbe2aae50;
          auVar1686._0_8_ = 0xbe2aae50be2aae50;
          auVar1686._12_4_ = 0xbe2aae50;
          auVar1740._8_4_ = 0x3e4cceac;
          auVar1740._0_8_ = 0x3e4cceac3e4cceac;
          auVar1740._12_4_ = 0x3e4cceac;
          auVar1791._8_4_ = 0xbe7ffffc;
          auVar1791._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar1791._12_4_ = 0xbe7ffffc;
          auVar461 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar519 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar472 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar464 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar460 = vxorps_avx512vl(auVar460,auVar460);
          auVar442 = vpcmpeqd_avx(auVar442,auVar442);
          auVar465 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar466 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar469 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar470 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar523 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar443 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar445 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar446 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          local_88 = auVar964._0_4_;
          fStack_84 = auVar964._4_4_;
          fStack_80 = auVar964._8_4_;
          fStack_7c = auVar964._12_4_;
          uVar882 = uVar425;
          do {
            auVar90._8_4_ = 0x800000;
            auVar90._0_8_ = 0x80000000800000;
            auVar90._12_4_ = 0x800000;
            auVar447 = vmaxps_avx512vl(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1,auVar90);
            auVar439 = vpsrld_avx512vl(auVar447,0x17);
            auVar1048._8_4_ = 0x807fffff;
            auVar1048._0_8_ = 0x807fffff807fffff;
            auVar1048._12_4_ = 0x807fffff;
            auVar91._8_4_ = 0x3f000000;
            auVar91._0_8_ = 0x3f0000003f000000;
            auVar91._12_4_ = 0x3f000000;
            auVar447 = vpternlogd_avx512vl(auVar447,auVar1048,auVar91,0xea);
            auVar92._8_4_ = 0x3f3504f3;
            auVar92._0_8_ = 0x3f3504f33f3504f3;
            auVar92._12_4_ = 0x3f3504f3;
            uVar47 = vcmpps_avx512vl(auVar447,auVar92,1);
            auVar440 = vaddps_avx512vl(auVar447,auVar1299);
            auVar447 = vaddps_avx512vl(auVar440,auVar447);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar526._0_4_ = (float)((uint)bVar12 * auVar447._0_4_ | (uint)!bVar12 * auVar440._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar526._4_4_ = (float)((uint)bVar12 * auVar447._4_4_ | (uint)!bVar12 * auVar440._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar526._8_4_ = (float)((uint)bVar12 * auVar447._8_4_ | (uint)!bVar12 * auVar440._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar526._12_4_ =
                 (float)((uint)bVar12 * auVar447._12_4_ | (uint)!bVar12 * auVar440._12_4_);
            auVar447 = vfmadd213ps_avx512vl(auVar1416,auVar526,auVar1470);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar526,auVar1524);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar526,auVar1578);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar526,auVar1632);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar526,auVar1686);
            auVar1126._0_4_ = auVar526._0_4_ * auVar526._0_4_;
            auVar1126._4_4_ = auVar526._4_4_ * auVar526._4_4_;
            auVar1126._8_4_ = auVar526._8_4_ * auVar526._8_4_;
            auVar1126._12_4_ = auVar526._12_4_ * auVar526._12_4_;
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar526,auVar1740);
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar526,auVar1791);
            auVar1182._0_4_ = auVar1126._0_4_ * auVar526._0_4_;
            auVar1182._4_4_ = auVar1126._4_4_ * auVar526._4_4_;
            auVar1182._8_4_ = auVar1126._8_4_ * auVar526._8_4_;
            auVar1182._12_4_ = auVar1126._12_4_ * auVar526._12_4_;
            auVar447 = vfmadd213ps_avx512vl(auVar447,auVar526,auVar461);
            auVar440 = vmulps_avx512vl(auVar1182,auVar447);
            auVar93._8_4_ = 0xffffff82;
            auVar93._0_8_ = 0xffffff82ffffff82;
            auVar93._12_4_ = 0xffffff82;
            auVar447 = vpaddd_avx512vl(auVar439,auVar93);
            auVar447 = vcvtdq2ps_avx(auVar447);
            auVar439 = vsubps_avx512vl(auVar447,auVar1360);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar527._0_4_ = (uint)bVar12 * auVar439._0_4_ | (uint)!bVar12 * auVar447._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar527._4_4_ = (uint)bVar12 * auVar439._4_4_ | (uint)!bVar12 * auVar447._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar527._8_4_ = (uint)bVar12 * auVar439._8_4_ | (uint)!bVar12 * auVar447._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar527._12_4_ = (uint)bVar12 * auVar439._12_4_ | (uint)!bVar12 * auVar447._12_4_;
            auVar447 = vfmadd231ps_avx512vl(auVar440,auVar527,auVar519);
            auVar447 = vfmsub231ps_avx512vl(auVar447,auVar472,auVar1126);
            auVar447 = vsubps_avx(auVar447,auVar526);
            uVar47 = vcmpps_avx512vl(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1,auVar460,2);
            auVar447 = vfmsub231ps_avx512vl(auVar447,auVar464,auVar527);
            bVar12 = (bool)((byte)uVar47 & 1);
            bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar965._0_4_ =
                 (float)((uint)bVar12 * auVar442._0_4_ | (uint)!bVar12 * auVar447._0_4_) * local_88;
            auVar965._4_4_ =
                 (float)((uint)bVar13 * auVar442._4_4_ | (uint)!bVar13 * auVar447._4_4_) * fStack_84
            ;
            auVar965._8_4_ =
                 (float)((uint)bVar14 * auVar442._8_4_ | (uint)!bVar14 * auVar447._8_4_) * fStack_80
            ;
            auVar965._12_4_ =
                 (float)((uint)bVar15 * auVar442._12_4_ | (uint)!bVar15 * auVar447._12_4_) *
                 fStack_7c;
            auVar447 = vminps_avx512vl(auVar965,auVar465);
            auVar439 = vmaxps_avx512vl(auVar447,auVar466);
            auVar440 = vfmadd231ps_avx512vl(auVar472,auVar439,auVar469);
            auVar1127._0_4_ = (int)auVar440._0_4_;
            auVar1127._4_4_ = (int)auVar440._4_4_;
            auVar1127._8_4_ = (int)auVar440._8_4_;
            auVar1127._12_4_ = (int)auVar440._12_4_;
            auVar447 = vcvtdq2ps_avx(auVar1127);
            uVar47 = vcmpps_avx512vl(auVar440,auVar447,1);
            auVar440 = vsubps_avx512vl(auVar447,auVar1360);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar528._0_4_ = (float)((uint)bVar12 * auVar440._0_4_ | (uint)!bVar12 * auVar447._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar528._4_4_ = (float)((uint)bVar12 * auVar440._4_4_ | (uint)!bVar12 * auVar447._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar528._8_4_ = (float)((uint)bVar12 * auVar440._8_4_ | (uint)!bVar12 * auVar447._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar528._12_4_ =
                 (float)((uint)bVar12 * auVar440._12_4_ | (uint)!bVar12 * auVar447._12_4_);
            auVar447 = vfmsub231ps_avx512vl(auVar439,auVar528,auVar464);
            auVar447 = vfnmsub231ps_avx512vl(auVar447,auVar528,auVar519);
            auVar439 = vfmadd213ps_avx512vl(auVar470,auVar447,auVar523);
            auVar1183._0_4_ = auVar447._0_4_ * auVar447._0_4_;
            auVar1183._4_4_ = auVar447._4_4_ * auVar447._4_4_;
            auVar1183._8_4_ = auVar447._8_4_ * auVar447._8_4_;
            auVar1183._12_4_ = auVar447._12_4_ * auVar447._12_4_;
            auVar439 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar443);
            auVar439 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar444);
            auVar439 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar445);
            auVar439 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar472);
            auVar447 = vfmadd213ps_fma(auVar439,auVar1183,auVar447);
            auVar966._0_4_ = (int)auVar528._0_4_;
            auVar966._4_4_ = (int)auVar528._4_4_;
            auVar966._8_4_ = (int)auVar528._8_4_;
            auVar966._12_4_ = (int)auVar528._12_4_;
            auVar439 = vpslld_avx(auVar966,0x17);
            auVar439 = vpaddd_avx512vl(auVar439,auVar446);
            auVar447 = vfmadd213ps_fma(auVar439,auVar447,auVar439);
            *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar447;
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
            uVar425 = uVar882 + 4;
            iVar424 = uVar882 + 7;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          return;
        }
        lVar428 = 0;
        do {
          fVar891 = powf(*(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4),fVar890);
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = fVar891;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
    }
    if (bp != 1) {
      return;
    }
    if (aw == bw) {
      if (0 < (int)uVar425 && iVar424 == 0x10) {
        in_ZMM3 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar734 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar716 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar717 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar718 = vpxord_avx512f(in_ZMM3,auVar716);
        auVar719 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar720 = vpxord_avx512f(auVar719,auVar716);
        auVar716 = vpxord_avx512f(auVar717,auVar716);
        auVar472 = vxorps_avx512vl(auVar472,auVar472);
        in_ZMM29 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
        uVar427 = uVar425;
        do {
          auVar721 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          auVar722 = vmaxps_avx512f(auVar721,(undefined1  [64])_ps512_min_norm_pos);
          auVar723 = vpsrld_avx512f(auVar722,0x17);
          auVar722 = vpternlogd_avx512f(auVar722,in_ZMM3,(undefined1  [64])_ps512_inv_mant_mask,0xec
                                       );
          uVar47 = vcmpps_avx512f(auVar722,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar724 = vsubps_avx512f(auVar722,(undefined1  [64])afVar407);
          auVar722 = vaddps_avx512f(auVar724,auVar722);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar763._0_4_ = (uint)bVar12 * auVar722._0_4_ | (uint)!bVar12 * auVar724._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar763._4_4_ = (uint)bVar12 * auVar722._4_4_ | (uint)!bVar12 * auVar724._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar763._8_4_ = (uint)bVar12 * auVar722._8_4_ | (uint)!bVar12 * auVar724._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar763._12_4_ = (uint)bVar12 * auVar722._12_4_ | (uint)!bVar12 * auVar724._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar763._16_4_ = (uint)bVar12 * auVar722._16_4_ | (uint)!bVar12 * auVar724._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar763._20_4_ = (uint)bVar12 * auVar722._20_4_ | (uint)!bVar12 * auVar724._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar763._24_4_ = (uint)bVar12 * auVar722._24_4_ | (uint)!bVar12 * auVar724._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar763._28_4_ = (uint)bVar12 * auVar722._28_4_ | (uint)!bVar12 * auVar724._28_4_;
          bVar29 = (byte)(uVar47 >> 8);
          bVar12 = (bool)(bVar29 & 1);
          auVar763._32_4_ = (uint)bVar12 * auVar722._32_4_ | (uint)!bVar12 * auVar724._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar763._36_4_ = (uint)bVar12 * auVar722._36_4_ | (uint)!bVar12 * auVar724._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar763._40_4_ = (uint)bVar12 * auVar722._40_4_ | (uint)!bVar12 * auVar724._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar763._44_4_ = (uint)bVar12 * auVar722._44_4_ | (uint)!bVar12 * auVar724._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar763._48_4_ = (uint)bVar12 * auVar722._48_4_ | (uint)!bVar12 * auVar724._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar763._52_4_ = (uint)bVar12 * auVar722._52_4_ | (uint)!bVar12 * auVar724._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar763._56_4_ = (uint)bVar12 * auVar722._56_4_ | (uint)!bVar12 * auVar724._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar763._60_4_ = (uint)bVar12 * auVar722._60_4_ | (uint)!bVar12 * auVar724._60_4_;
          auVar722 = vfmadd132ps_avx512f(auVar763,(undefined1  [64])afVar416,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar763,(undefined1  [64])afVar417);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar763,(undefined1  [64])afVar418);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar763,(undefined1  [64])afVar419);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar763,(undefined1  [64])afVar420);
          auVar724 = vmulps_avx512f(auVar763,auVar763);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar763,(undefined1  [64])afVar421);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar763,(undefined1  [64])afVar422);
          auVar725 = vmulps_avx512f(auVar724,auVar763);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar763,(undefined1  [64])afVar423);
          auVar722 = vfmadd213ps_avx512f(auVar725,auVar722,auVar763);
          auVar723 = vpsubd_avx512f(auVar723,auVar734);
          auVar723 = vcvtdq2ps_avx512f(auVar723);
          auVar725 = vaddps_avx512f(auVar723,(undefined1  [64])afVar407);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar764._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar725._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar764._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar725._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar764._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar725._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar764._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar725._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar764._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar725._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar764._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar725._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar764._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar725._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar764._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar725._28_4_;
          bVar12 = (bool)(bVar29 & 1);
          auVar764._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar725._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar764._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar725._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar764._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar725._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar764._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar725._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar764._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar725._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar764._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar725._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar764._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar725._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar764._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar725._60_4_;
          auVar722 = vfmadd231ps_avx512f(auVar722,auVar764,auVar717);
          auVar722 = vfmadd231ps_avx512f(auVar722,auVar718,auVar724);
          uVar47 = vcmpps_avx512f(auVar721,ZEXT1664(auVar472),2);
          auVar721 = vfmadd231ps_avx512f(auVar722,auVar719,auVar764);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar765._0_4_ = (uint)bVar12 * in_ZMM29._0_4_ | (uint)!bVar12 * auVar721._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar765._4_4_ = (uint)bVar12 * in_ZMM29._4_4_ | (uint)!bVar12 * auVar721._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar765._8_4_ = (uint)bVar12 * in_ZMM29._8_4_ | (uint)!bVar12 * auVar721._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar765._12_4_ = (uint)bVar12 * in_ZMM29._12_4_ | (uint)!bVar12 * auVar721._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar765._16_4_ = (uint)bVar12 * in_ZMM29._16_4_ | (uint)!bVar12 * auVar721._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar765._20_4_ = (uint)bVar12 * in_ZMM29._20_4_ | (uint)!bVar12 * auVar721._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar765._24_4_ = (uint)bVar12 * in_ZMM29._24_4_ | (uint)!bVar12 * auVar721._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar765._28_4_ = (uint)bVar12 * in_ZMM29._28_4_ | (uint)!bVar12 * auVar721._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar765._32_4_ = (uint)bVar12 * in_ZMM29._32_4_ | (uint)!bVar12 * auVar721._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar765._36_4_ = (uint)bVar12 * in_ZMM29._36_4_ | (uint)!bVar12 * auVar721._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar765._40_4_ = (uint)bVar12 * in_ZMM29._40_4_ | (uint)!bVar12 * auVar721._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar765._44_4_ = (uint)bVar12 * in_ZMM29._44_4_ | (uint)!bVar12 * auVar721._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar765._48_4_ = (uint)bVar12 * in_ZMM29._48_4_ | (uint)!bVar12 * auVar721._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar765._52_4_ = (uint)bVar12 * in_ZMM29._52_4_ | (uint)!bVar12 * auVar721._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar765._56_4_ = (uint)bVar12 * in_ZMM29._56_4_ | (uint)!bVar12 * auVar721._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar765._60_4_ = (uint)bVar12 * in_ZMM29._60_4_ | (uint)!bVar12 * auVar721._60_4_;
          auVar721 = vmulps_avx512f(auVar765,*(undefined1 (*) [64])ptr);
          auVar721 = vminps_avx512f(auVar721,(undefined1  [64])afVar408);
          auVar721 = vmaxps_avx512f(auVar721,(undefined1  [64])afVar409);
          auVar722 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar721,in_ZMM3);
          auVar723 = vrndscaleps_avx512f(auVar722,1);
          uVar47 = vcmpps_avx512f(auVar722,auVar723,1);
          auVar722 = vsubps_avx512f(auVar723,(undefined1  [64])afVar407);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar766._0_4_ = (uint)bVar12 * auVar722._0_4_ | (uint)!bVar12 * auVar723._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar766._4_4_ = (uint)bVar12 * auVar722._4_4_ | (uint)!bVar12 * auVar723._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar766._8_4_ = (uint)bVar12 * auVar722._8_4_ | (uint)!bVar12 * auVar723._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar766._12_4_ = (uint)bVar12 * auVar722._12_4_ | (uint)!bVar12 * auVar723._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar766._16_4_ = (uint)bVar12 * auVar722._16_4_ | (uint)!bVar12 * auVar723._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar766._20_4_ = (uint)bVar12 * auVar722._20_4_ | (uint)!bVar12 * auVar723._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar766._24_4_ = (uint)bVar12 * auVar722._24_4_ | (uint)!bVar12 * auVar723._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar766._28_4_ = (uint)bVar12 * auVar722._28_4_ | (uint)!bVar12 * auVar723._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar766._32_4_ = (uint)bVar12 * auVar722._32_4_ | (uint)!bVar12 * auVar723._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar766._36_4_ = (uint)bVar12 * auVar722._36_4_ | (uint)!bVar12 * auVar723._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar766._40_4_ = (uint)bVar12 * auVar722._40_4_ | (uint)!bVar12 * auVar723._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar766._44_4_ = (uint)bVar12 * auVar722._44_4_ | (uint)!bVar12 * auVar723._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar766._48_4_ = (uint)bVar12 * auVar722._48_4_ | (uint)!bVar12 * auVar723._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar766._52_4_ = (uint)bVar12 * auVar722._52_4_ | (uint)!bVar12 * auVar723._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar766._56_4_ = (uint)bVar12 * auVar722._56_4_ | (uint)!bVar12 * auVar723._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar766._60_4_ = (uint)bVar12 * auVar722._60_4_ | (uint)!bVar12 * auVar723._60_4_;
          auVar721 = vfmadd231ps_avx512f(auVar721,auVar766,auVar720);
          auVar721 = vfmadd231ps_avx512f(auVar721,auVar766,auVar716);
          auVar722 = vfmadd213ps_avx512f(auVar721,(undefined1  [64])afVar411,
                                         (undefined1  [64])afVar412);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar721,(undefined1  [64])afVar413);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar721,(undefined1  [64])afVar414);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar721,(undefined1  [64])afVar415);
          auVar723 = vmulps_avx512f(auVar721,auVar721);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar721,in_ZMM3);
          auVar721 = vfmadd213ps_avx512f(auVar722,auVar723,auVar721);
          auVar722 = vcvttps2dq_avx512f(auVar766);
          in_ZMM2 = vaddps_avx512f(auVar721,(undefined1  [64])afVar407);
          auVar721 = vpaddd_avx512f(auVar722,auVar734);
          auVar721 = vpslld_avx512f(auVar721,0x17);
          auVar721 = vmulps_avx512f(in_ZMM2,auVar721);
          *(undefined1 (*) [64])outptr = auVar721;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar427 = uVar427 - 1;
          auVar442 = auVar519;
          auVar674 = auVar678;
        } while (uVar427 != 0);
      }
      afVar423 = _ps512_cephes_log_p8;
      afVar422 = _ps512_cephes_log_p7;
      afVar421 = _ps512_cephes_log_p6;
      afVar420 = _ps512_cephes_log_p5;
      afVar419 = _ps512_cephes_log_p4;
      afVar418 = _ps512_cephes_log_p3;
      afVar417 = _ps512_cephes_log_p2;
      afVar416 = _ps512_cephes_log_p1;
      afVar415 = ::_ps512_cephes_exp_p4;
      afVar414 = ::_ps512_cephes_exp_p3;
      afVar413 = ::_ps512_cephes_exp_p2;
      afVar412 = ::_ps512_cephes_exp_p1;
      afVar411 = ::_ps512_cephes_exp_p0;
      afVar410 = ::_ps512_cephes_LOG2EF;
      afVar409 = ::_ps512_exp_lo;
      afVar408 = ::_ps512_exp_hi;
      afVar407 = ::_ps512_1;
      if (iVar424 == 8) {
        uVar427 = 0;
        if (1 < (int)uVar425) {
          auVar674 = ::_ps512_1._0_32_;
          in_ZMM3 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar734 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar716 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar717 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
          auVar718 = vpxord_avx512f(in_ZMM3,auVar716);
          auVar719 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
          auVar442 = ::_ps512_exp_lo._0_16_;
          auVar720 = vpxord_avx512f(auVar719,auVar716);
          auVar716 = vpxord_avx512f(auVar717,auVar716);
          iVar426 = 1;
          auVar472 = vxorps_avx512vl(auVar472,auVar472);
          in_ZMM29 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
          do {
            auVar677 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar678 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
            auVar721 = vinsertf64x4_avx512f(ZEXT3264(auVar677),auVar678,1);
            auVar722 = vmaxps_avx512f(auVar721,(undefined1  [64])_ps512_min_norm_pos);
            auVar723 = vpsrld_avx512f(auVar722,0x17);
            auVar722 = vpternlogd_avx512f(auVar722,in_ZMM3,(undefined1  [64])_ps512_inv_mant_mask,
                                          0xec);
            uVar47 = vcmpps_avx512f(auVar722,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar724 = vsubps_avx512f(auVar722,(undefined1  [64])afVar407);
            auVar722 = vaddps_avx512f(auVar724,auVar722);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar767._0_4_ = (uint)bVar12 * auVar722._0_4_ | (uint)!bVar12 * auVar724._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar767._4_4_ = (uint)bVar12 * auVar722._4_4_ | (uint)!bVar12 * auVar724._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar767._8_4_ = (uint)bVar12 * auVar722._8_4_ | (uint)!bVar12 * auVar724._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar767._12_4_ = (uint)bVar12 * auVar722._12_4_ | (uint)!bVar12 * auVar724._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar767._16_4_ = (uint)bVar12 * auVar722._16_4_ | (uint)!bVar12 * auVar724._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar767._20_4_ = (uint)bVar12 * auVar722._20_4_ | (uint)!bVar12 * auVar724._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar767._24_4_ = (uint)bVar12 * auVar722._24_4_ | (uint)!bVar12 * auVar724._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar767._28_4_ = (uint)bVar12 * auVar722._28_4_ | (uint)!bVar12 * auVar724._28_4_;
            bVar29 = (byte)(uVar47 >> 8);
            bVar12 = (bool)(bVar29 & 1);
            auVar767._32_4_ = (uint)bVar12 * auVar722._32_4_ | (uint)!bVar12 * auVar724._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar767._36_4_ = (uint)bVar12 * auVar722._36_4_ | (uint)!bVar12 * auVar724._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar767._40_4_ = (uint)bVar12 * auVar722._40_4_ | (uint)!bVar12 * auVar724._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar767._44_4_ = (uint)bVar12 * auVar722._44_4_ | (uint)!bVar12 * auVar724._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar767._48_4_ = (uint)bVar12 * auVar722._48_4_ | (uint)!bVar12 * auVar724._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar767._52_4_ = (uint)bVar12 * auVar722._52_4_ | (uint)!bVar12 * auVar724._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar767._56_4_ = (uint)bVar12 * auVar722._56_4_ | (uint)!bVar12 * auVar724._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar767._60_4_ = (uint)bVar12 * auVar722._60_4_ | (uint)!bVar12 * auVar724._60_4_;
            auVar722 = vfmadd132ps_avx512f(auVar767,(undefined1  [64])afVar416,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar767,(undefined1  [64])afVar417);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar767,(undefined1  [64])afVar418);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar767,(undefined1  [64])afVar419);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar767,(undefined1  [64])afVar420);
            auVar724 = vmulps_avx512f(auVar767,auVar767);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar767,(undefined1  [64])afVar421);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar767,(undefined1  [64])afVar422);
            auVar725 = vmulps_avx512f(auVar724,auVar767);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar767,(undefined1  [64])afVar423);
            auVar722 = vfmadd213ps_avx512f(auVar725,auVar722,auVar767);
            auVar723 = vpsubd_avx512f(auVar723,auVar734);
            auVar723 = vcvtdq2ps_avx512f(auVar723);
            auVar725 = vaddps_avx512f(auVar723,(undefined1  [64])afVar407);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar768._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar725._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar768._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar725._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar768._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar725._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar768._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar725._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar768._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar725._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar768._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar725._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar768._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar725._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar768._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar725._28_4_;
            bVar12 = (bool)(bVar29 & 1);
            auVar768._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar725._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar768._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar725._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar768._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar725._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar768._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar725._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar768._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar725._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar768._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar725._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar768._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar725._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar768._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar725._60_4_;
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar768,auVar717);
            auVar722 = vfmadd231ps_avx512f(auVar722,auVar718,auVar724);
            uVar47 = vcmpps_avx512f(auVar721,ZEXT1664(auVar472),2);
            auVar721 = vfmadd231ps_avx512f(auVar722,auVar719,auVar768);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar769._0_4_ = (uint)bVar12 * in_ZMM29._0_4_ | (uint)!bVar12 * auVar721._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar769._4_4_ = (uint)bVar12 * in_ZMM29._4_4_ | (uint)!bVar12 * auVar721._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar769._8_4_ = (uint)bVar12 * in_ZMM29._8_4_ | (uint)!bVar12 * auVar721._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar769._12_4_ = (uint)bVar12 * in_ZMM29._12_4_ | (uint)!bVar12 * auVar721._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar769._16_4_ = (uint)bVar12 * in_ZMM29._16_4_ | (uint)!bVar12 * auVar721._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar769._20_4_ = (uint)bVar12 * in_ZMM29._20_4_ | (uint)!bVar12 * auVar721._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar769._24_4_ = (uint)bVar12 * in_ZMM29._24_4_ | (uint)!bVar12 * auVar721._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar769._28_4_ = (uint)bVar12 * in_ZMM29._28_4_ | (uint)!bVar12 * auVar721._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            auVar769._32_4_ = (uint)bVar12 * in_ZMM29._32_4_ | (uint)!bVar12 * auVar721._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar769._36_4_ = (uint)bVar12 * in_ZMM29._36_4_ | (uint)!bVar12 * auVar721._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar769._40_4_ = (uint)bVar12 * in_ZMM29._40_4_ | (uint)!bVar12 * auVar721._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar769._44_4_ = (uint)bVar12 * in_ZMM29._44_4_ | (uint)!bVar12 * auVar721._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar769._48_4_ = (uint)bVar12 * in_ZMM29._48_4_ | (uint)!bVar12 * auVar721._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar769._52_4_ = (uint)bVar12 * in_ZMM29._52_4_ | (uint)!bVar12 * auVar721._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar769._56_4_ = (uint)bVar12 * in_ZMM29._56_4_ | (uint)!bVar12 * auVar721._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar769._60_4_ = (uint)bVar12 * in_ZMM29._60_4_ | (uint)!bVar12 * auVar721._60_4_;
            auVar721 = vmulps_avx512f(auVar769,*(undefined1 (*) [64])ptr);
            auVar721 = vminps_avx512f(auVar721,(undefined1  [64])afVar408);
            auVar721 = vmaxps_avx512f(auVar721,(undefined1  [64])afVar409);
            auVar722 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar721,in_ZMM3);
            auVar723 = vrndscaleps_avx512f(auVar722,1);
            uVar47 = vcmpps_avx512f(auVar722,auVar723,1);
            auVar722 = vsubps_avx512f(auVar723,(undefined1  [64])afVar407);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar770._0_4_ = (uint)bVar12 * auVar722._0_4_ | (uint)!bVar12 * auVar723._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar770._4_4_ = (uint)bVar12 * auVar722._4_4_ | (uint)!bVar12 * auVar723._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar770._8_4_ = (uint)bVar12 * auVar722._8_4_ | (uint)!bVar12 * auVar723._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar770._12_4_ = (uint)bVar12 * auVar722._12_4_ | (uint)!bVar12 * auVar723._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar770._16_4_ = (uint)bVar12 * auVar722._16_4_ | (uint)!bVar12 * auVar723._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar770._20_4_ = (uint)bVar12 * auVar722._20_4_ | (uint)!bVar12 * auVar723._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar770._24_4_ = (uint)bVar12 * auVar722._24_4_ | (uint)!bVar12 * auVar723._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar770._28_4_ = (uint)bVar12 * auVar722._28_4_ | (uint)!bVar12 * auVar723._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            auVar770._32_4_ = (uint)bVar12 * auVar722._32_4_ | (uint)!bVar12 * auVar723._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar770._36_4_ = (uint)bVar12 * auVar722._36_4_ | (uint)!bVar12 * auVar723._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar770._40_4_ = (uint)bVar12 * auVar722._40_4_ | (uint)!bVar12 * auVar723._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar770._44_4_ = (uint)bVar12 * auVar722._44_4_ | (uint)!bVar12 * auVar723._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar770._48_4_ = (uint)bVar12 * auVar722._48_4_ | (uint)!bVar12 * auVar723._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar770._52_4_ = (uint)bVar12 * auVar722._52_4_ | (uint)!bVar12 * auVar723._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar770._56_4_ = (uint)bVar12 * auVar722._56_4_ | (uint)!bVar12 * auVar723._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar770._60_4_ = (uint)bVar12 * auVar722._60_4_ | (uint)!bVar12 * auVar723._60_4_;
            auVar721 = vfmadd231ps_avx512f(auVar721,auVar770,auVar720);
            auVar721 = vfmadd231ps_avx512f(auVar721,auVar770,auVar716);
            auVar722 = vfmadd213ps_avx512f(auVar721,(undefined1  [64])afVar411,
                                           (undefined1  [64])afVar412);
            auVar723 = vmulps_avx512f(auVar721,auVar721);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar721,(undefined1  [64])afVar413);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar721,(undefined1  [64])afVar414);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar721,(undefined1  [64])afVar415);
            auVar722 = vfmadd213ps_avx512f(auVar722,auVar721,in_ZMM3);
            auVar721 = vfmadd213ps_avx512f(auVar722,auVar723,auVar721);
            auVar721 = vaddps_avx512f(auVar721,(undefined1  [64])afVar407);
            auVar722 = vcvttps2dq_avx512f(auVar770);
            auVar722 = vpaddd_avx512f(auVar722,auVar734);
            in_ZMM2 = vpslld_avx512f(auVar722,0x17);
            auVar721 = vmulps_avx512f(auVar721,in_ZMM2);
            *(undefined1 (*) [64])outptr = auVar721;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar426 = iVar426 + 2;
          } while (iVar426 < (int)uVar425);
          uVar427 = uVar425 & 0x7ffffffe;
        }
        iVar426 = uVar425 - uVar427;
        if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
          auVar1136._8_4_ = 0xffffff82;
          auVar1136._0_8_ = 0xffffff82ffffff82;
          auVar1136._12_4_ = 0xffffff82;
          auVar1136._16_4_ = 0xffffff82;
          auVar1136._20_4_ = 0xffffff82;
          auVar1136._24_4_ = 0xffffff82;
          auVar1136._28_4_ = 0xffffff82;
          in_ZMM3 = ZEXT3264(auVar1136);
          auVar1197._8_4_ = 0x3f3504f3;
          auVar1197._0_8_ = 0x3f3504f33f3504f3;
          auVar1197._12_4_ = 0x3f3504f3;
          auVar1197._16_4_ = 0x3f3504f3;
          auVar1197._20_4_ = 0x3f3504f3;
          auVar1197._24_4_ = 0x3f3504f3;
          auVar1197._28_4_ = 0x3f3504f3;
          auVar1252._8_4_ = 0xbf800000;
          auVar1252._0_8_ = 0xbf800000bf800000;
          auVar1252._12_4_ = 0xbf800000;
          auVar1252._16_4_ = 0xbf800000;
          auVar1252._20_4_ = 0xbf800000;
          auVar1252._24_4_ = 0xbf800000;
          auVar1252._28_4_ = 0xbf800000;
          auVar1314._8_4_ = 0x3f800000;
          auVar1314._0_8_ = 0x3f8000003f800000;
          auVar1314._12_4_ = 0x3f800000;
          auVar1314._16_4_ = 0x3f800000;
          auVar1314._20_4_ = 0x3f800000;
          auVar1314._24_4_ = 0x3f800000;
          auVar1314._28_4_ = 0x3f800000;
          auVar1373._8_4_ = 0x3d9021bb;
          auVar1373._0_8_ = 0x3d9021bb3d9021bb;
          auVar1373._12_4_ = 0x3d9021bb;
          auVar1373._16_4_ = 0x3d9021bb;
          auVar1373._20_4_ = 0x3d9021bb;
          auVar1373._24_4_ = 0x3d9021bb;
          auVar1373._28_4_ = 0x3d9021bb;
          auVar1429._8_4_ = 0xbdebd1b8;
          auVar1429._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar1429._12_4_ = 0xbdebd1b8;
          auVar1429._16_4_ = 0xbdebd1b8;
          auVar1429._20_4_ = 0xbdebd1b8;
          auVar1429._24_4_ = 0xbdebd1b8;
          auVar1429._28_4_ = 0xbdebd1b8;
          auVar1483._8_4_ = 0x3def251a;
          auVar1483._0_8_ = 0x3def251a3def251a;
          auVar1483._12_4_ = 0x3def251a;
          auVar1483._16_4_ = 0x3def251a;
          auVar1483._20_4_ = 0x3def251a;
          auVar1483._24_4_ = 0x3def251a;
          auVar1483._28_4_ = 0x3def251a;
          auVar1537._8_4_ = 0xbdfe5d4f;
          auVar1537._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar1537._12_4_ = 0xbdfe5d4f;
          auVar1537._16_4_ = 0xbdfe5d4f;
          auVar1537._20_4_ = 0xbdfe5d4f;
          auVar1537._24_4_ = 0xbdfe5d4f;
          auVar1537._28_4_ = 0xbdfe5d4f;
          auVar1591._8_4_ = 0x3e11e9bf;
          auVar1591._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar1591._12_4_ = 0x3e11e9bf;
          auVar1591._16_4_ = 0x3e11e9bf;
          auVar1591._20_4_ = 0x3e11e9bf;
          auVar1591._24_4_ = 0x3e11e9bf;
          auVar1591._28_4_ = 0x3e11e9bf;
          auVar1645._8_4_ = 0xbe2aae50;
          auVar1645._0_8_ = 0xbe2aae50be2aae50;
          auVar1645._12_4_ = 0xbe2aae50;
          auVar1645._16_4_ = 0xbe2aae50;
          auVar1645._20_4_ = 0xbe2aae50;
          auVar1645._24_4_ = 0xbe2aae50;
          auVar1645._28_4_ = 0xbe2aae50;
          auVar1699._8_4_ = 0x3e4cceac;
          auVar1699._0_8_ = 0x3e4cceac3e4cceac;
          auVar1699._12_4_ = 0x3e4cceac;
          auVar1699._16_4_ = 0x3e4cceac;
          auVar1699._20_4_ = 0x3e4cceac;
          auVar1699._24_4_ = 0x3e4cceac;
          auVar1699._28_4_ = 0x3e4cceac;
          auVar1751._8_4_ = 0xbe7ffffc;
          auVar1751._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar1751._12_4_ = 0xbe7ffffc;
          auVar1751._16_4_ = 0xbe7ffffc;
          auVar1751._20_4_ = 0xbe7ffffc;
          auVar1751._24_4_ = 0xbe7ffffc;
          auVar1751._28_4_ = 0xbe7ffffc;
          auVar1802._8_4_ = 0x3eaaaaaa;
          auVar1802._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar1802._12_4_ = 0x3eaaaaaa;
          auVar1802._16_4_ = 0x3eaaaaaa;
          auVar1802._20_4_ = 0x3eaaaaaa;
          auVar1802._24_4_ = 0x3eaaaaaa;
          auVar1802._28_4_ = 0x3eaaaaaa;
          auVar677 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar678 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar442 = vxorps_avx512vl(auVar442,auVar442);
          auVar674 = vpcmpeqd_avx2(auVar674,auVar674);
          auVar679 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar680 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar683 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar684 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar685 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar701 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar565 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar566 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar472 = auVar566._0_16_;
          auVar567 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          in_ZMM29 = ZEXT3264(auVar567);
          do {
            auVar568 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar224._8_4_ = 0x800000;
            auVar224._0_8_ = 0x80000000800000;
            auVar224._12_4_ = 0x800000;
            auVar224._16_4_ = 0x800000;
            auVar224._20_4_ = 0x800000;
            auVar224._24_4_ = 0x800000;
            auVar224._28_4_ = 0x800000;
            auVar569 = vmaxps_avx512vl(auVar568,auVar224);
            auVar570 = vpsrld_avx512vl(auVar569,0x17);
            auVar987._8_4_ = 0x807fffff;
            auVar987._0_8_ = 0x807fffff807fffff;
            auVar987._12_4_ = 0x807fffff;
            auVar987._16_4_ = 0x807fffff;
            auVar987._20_4_ = 0x807fffff;
            auVar987._24_4_ = 0x807fffff;
            auVar987._28_4_ = 0x807fffff;
            auVar225._8_4_ = 0x3f000000;
            auVar225._0_8_ = 0x3f0000003f000000;
            auVar225._12_4_ = 0x3f000000;
            auVar225._16_4_ = 0x3f000000;
            auVar225._20_4_ = 0x3f000000;
            auVar225._24_4_ = 0x3f000000;
            auVar225._28_4_ = 0x3f000000;
            auVar569 = vpternlogd_avx512vl(auVar569,auVar987,auVar225,0xea);
            uVar47 = vcmpps_avx512vl(auVar569,auVar1197,1);
            auVar563 = vaddps_avx512vl(auVar569,auVar1252);
            auVar569 = vaddps_avx512vl(auVar563,auVar569);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar600._0_4_ = (uint)bVar12 * auVar569._0_4_ | (uint)!bVar12 * auVar563._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar600._4_4_ = (uint)bVar12 * auVar569._4_4_ | (uint)!bVar12 * auVar563._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar600._8_4_ = (uint)bVar12 * auVar569._8_4_ | (uint)!bVar12 * auVar563._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar600._12_4_ = (uint)bVar12 * auVar569._12_4_ | (uint)!bVar12 * auVar563._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar600._16_4_ = (uint)bVar12 * auVar569._16_4_ | (uint)!bVar12 * auVar563._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar600._20_4_ = (uint)bVar12 * auVar569._20_4_ | (uint)!bVar12 * auVar563._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar600._24_4_ = (uint)bVar12 * auVar569._24_4_ | (uint)!bVar12 * auVar563._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar600._28_4_ = (uint)bVar12 * auVar569._28_4_ | (uint)!bVar12 * auVar563._28_4_;
            auVar569 = vfmadd213ps_avx512vl(auVar1373,auVar600,auVar1429);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar600,auVar1483);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar600,auVar1537);
            uVar430 = vcmpps_avx512vl(auVar568,ZEXT1632(auVar442),2);
            auVar568 = vfmadd213ps_avx512vl(auVar569,auVar600,auVar1591);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar600,auVar1645);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar600,auVar1699);
            auVar569 = vmulps_avx512vl(auVar600,auVar600);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar600,auVar1751);
            auVar568 = vfmadd213ps_avx512vl(auVar568,auVar600,auVar1802);
            auVar563 = vmulps_avx512vl(auVar569,auVar600);
            auVar568 = vmulps_avx512vl(auVar563,auVar568);
            auVar570 = vpaddd_avx512vl(auVar570,auVar1136);
            auVar570 = vcvtdq2ps_avx512vl(auVar570);
            auVar563 = vsubps_avx512vl(auVar570,auVar1314);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar601._0_4_ = (uint)bVar12 * auVar563._0_4_ | (uint)!bVar12 * auVar570._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar601._4_4_ = (uint)bVar12 * auVar563._4_4_ | (uint)!bVar12 * auVar570._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar601._8_4_ = (uint)bVar12 * auVar563._8_4_ | (uint)!bVar12 * auVar570._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar601._12_4_ = (uint)bVar12 * auVar563._12_4_ | (uint)!bVar12 * auVar570._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar601._16_4_ = (uint)bVar12 * auVar563._16_4_ | (uint)!bVar12 * auVar570._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar601._20_4_ = (uint)bVar12 * auVar563._20_4_ | (uint)!bVar12 * auVar570._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar601._24_4_ = (uint)bVar12 * auVar563._24_4_ | (uint)!bVar12 * auVar570._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar601._28_4_ = (uint)bVar12 * auVar563._28_4_ | (uint)!bVar12 * auVar570._28_4_;
            auVar568 = vfmadd231ps_avx512vl(auVar568,auVar601,auVar677);
            auVar568 = vfmsub231ps_avx512vl(auVar568,auVar678,auVar569);
            auVar568 = vsubps_avx(auVar568,auVar600);
            auVar568 = vfmsub231ps_avx512vl(auVar568,auVar562,auVar601);
            bVar12 = (bool)((byte)uVar430 & 1);
            bVar13 = (bool)((byte)(uVar430 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar430 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar430 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar430 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar430 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar430 >> 6) & 1);
            bVar19 = SUB81(uVar430 >> 7,0);
            auVar371._4_4_ =
                 (float)((uint)bVar13 * auVar674._4_4_ | (uint)!bVar13 * auVar568._4_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 4);
            auVar371._0_4_ =
                 (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar568._0_4_) *
                 *(float *)*(undefined1 (*) [64])ptr;
            auVar371._8_4_ =
                 (float)((uint)bVar14 * auVar674._8_4_ | (uint)!bVar14 * auVar568._8_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 8);
            auVar371._12_4_ =
                 (float)((uint)bVar15 * auVar674._12_4_ | (uint)!bVar15 * auVar568._12_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            auVar371._16_4_ =
                 (float)((uint)bVar16 * auVar674._16_4_ | (uint)!bVar16 * auVar568._16_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x10);
            auVar371._20_4_ =
                 (float)((uint)bVar17 * auVar674._20_4_ | (uint)!bVar17 * auVar568._20_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x14);
            auVar371._24_4_ =
                 (float)((uint)bVar18 * auVar674._24_4_ | (uint)!bVar18 * auVar568._24_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x18);
            auVar371._28_4_ = (uint)bVar19 * auVar674._28_4_ | (uint)!bVar19 * auVar568._28_4_;
            auVar568 = vminps_avx512vl(auVar371,auVar679);
            auVar568 = vmaxps_avx512vl(auVar568,auVar680);
            auVar569 = vfmadd231ps_avx512vl(auVar678,auVar568,auVar683);
            auVar570 = vrndscaleps_avx512vl(auVar569,1);
            uVar47 = vcmpps_avx512vl(auVar569,auVar570,1);
            auVar569 = vsubps_avx512vl(auVar570,auVar1314);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar602._0_4_ = (uint)bVar12 * auVar569._0_4_ | (uint)!bVar12 * auVar570._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar602._4_4_ = (uint)bVar12 * auVar569._4_4_ | (uint)!bVar12 * auVar570._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar602._8_4_ = (uint)bVar12 * auVar569._8_4_ | (uint)!bVar12 * auVar570._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar602._12_4_ = (uint)bVar12 * auVar569._12_4_ | (uint)!bVar12 * auVar570._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar602._16_4_ = (uint)bVar12 * auVar569._16_4_ | (uint)!bVar12 * auVar570._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar602._20_4_ = (uint)bVar12 * auVar569._20_4_ | (uint)!bVar12 * auVar570._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar602._24_4_ = (uint)bVar12 * auVar569._24_4_ | (uint)!bVar12 * auVar570._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar602._28_4_ = (uint)bVar12 * auVar569._28_4_ | (uint)!bVar12 * auVar570._28_4_;
            auVar568 = vfmsub231ps_avx512vl(auVar568,auVar602,auVar562);
            auVar568 = vfnmsub231ps_avx512vl(auVar568,auVar602,auVar677);
            auVar569 = vfmadd213ps_avx512vl(auVar684,auVar568,auVar685);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar701);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar565);
            auVar570 = vmulps_avx512vl(auVar568,auVar568);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar566);
            auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar678);
            auVar568 = vfmadd213ps_avx512vl(auVar569,auVar570,auVar568);
            in_ZMM2 = ZEXT3264(auVar568);
            auVar569 = vcvttps2dq_avx512vl(auVar602);
            auVar569 = vpslld_avx2(auVar569,0x17);
            auVar569 = vpaddd_avx512vl(auVar569,auVar567);
            auVar460 = vfmadd213ps_fma(auVar569,auVar568,auVar569);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar460);
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar426 = iVar426 + -1;
          } while (iVar426 != 0);
        }
      }
      afVar423 = _ps512_cephes_log_p8;
      afVar422 = _ps512_cephes_log_p7;
      afVar421 = _ps512_cephes_log_p6;
      afVar420 = _ps512_cephes_log_p5;
      afVar419 = _ps512_cephes_log_p4;
      afVar418 = _ps512_cephes_log_p3;
      afVar417 = _ps512_cephes_log_p2;
      afVar416 = _ps512_cephes_log_p1;
      afVar415 = ::_ps512_cephes_exp_p4;
      afVar414 = ::_ps512_cephes_exp_p3;
      afVar413 = ::_ps512_cephes_exp_p2;
      afVar412 = ::_ps512_cephes_exp_p1;
      afVar411 = ::_ps512_cephes_exp_p0;
      afVar410 = ::_ps512_cephes_LOG2EF;
      afVar409 = ::_ps512_exp_lo;
      afVar408 = ::_ps512_exp_hi;
      afVar407 = ::_ps512_1;
      if (iVar424 != 4) {
        return;
      }
      uVar427 = 0;
      if (3 < (int)uVar425) {
        auVar674 = ::_ps512_1._0_32_;
        in_ZMM3 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar734 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar716 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar717 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar718 = vpxord_avx512f(in_ZMM3,auVar716);
        auVar719 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar442 = ::_ps512_exp_lo._0_16_;
        auVar720 = vpxord_avx512f(auVar719,auVar716);
        auVar716 = vpxord_avx512f(auVar717,auVar716);
        iVar424 = 3;
        auVar460 = vxorps_avx512vl(auVar472,auVar472);
        auVar721 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
        do {
          auVar461 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[2]));
          auVar519 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[3]));
          fVar890 = *ptr1;
          fVar891 = ptr1[1];
          auVar677 = vinsertf32x4_avx512vl(ZEXT1632(auVar461),auVar519,1);
          auVar722 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(fVar891,CONCAT48(fVar891,CONCAT44(
                                                  fVar891,fVar891))),
                                                  CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(
                                                  fVar890,fVar890))))),auVar677,1);
          auVar723 = vmaxps_avx512f(auVar722,(undefined1  [64])_ps512_min_norm_pos);
          auVar724 = vpsrld_avx512f(auVar723,0x17);
          auVar723 = vpternlogd_avx512f(auVar723,in_ZMM3,(undefined1  [64])_ps512_inv_mant_mask,0xec
                                       );
          uVar47 = vcmpps_avx512f(auVar723,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar725 = vsubps_avx512f(auVar723,(undefined1  [64])afVar407);
          auVar723 = vaddps_avx512f(auVar725,auVar723);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar771._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar725._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar771._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar725._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar771._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar725._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar771._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar725._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar771._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar725._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar771._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar725._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar771._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar725._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar771._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar725._28_4_;
          bVar29 = (byte)(uVar47 >> 8);
          bVar12 = (bool)(bVar29 & 1);
          auVar771._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar725._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar771._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar725._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar771._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar725._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar771._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar725._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar771._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar725._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar771._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar725._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar771._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar725._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar771._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar725._60_4_;
          auVar723 = vfmadd132ps_avx512f(auVar771,(undefined1  [64])afVar416,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar771,(undefined1  [64])afVar417);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar771,(undefined1  [64])afVar418);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar771,(undefined1  [64])afVar419);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar771,(undefined1  [64])afVar420);
          auVar725 = vmulps_avx512f(auVar771,auVar771);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar771,(undefined1  [64])afVar421);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar771,(undefined1  [64])afVar422);
          auVar726 = vmulps_avx512f(auVar725,auVar771);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar771,(undefined1  [64])afVar423);
          auVar723 = vfmadd213ps_avx512f(auVar726,auVar723,auVar771);
          auVar724 = vpsubd_avx512f(auVar724,auVar734);
          auVar724 = vcvtdq2ps_avx512f(auVar724);
          auVar726 = vaddps_avx512f(auVar724,(undefined1  [64])afVar407);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar772._0_4_ = (uint)bVar12 * auVar724._0_4_ | (uint)!bVar12 * auVar726._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar772._4_4_ = (uint)bVar12 * auVar724._4_4_ | (uint)!bVar12 * auVar726._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar772._8_4_ = (uint)bVar12 * auVar724._8_4_ | (uint)!bVar12 * auVar726._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar772._12_4_ = (uint)bVar12 * auVar724._12_4_ | (uint)!bVar12 * auVar726._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar772._16_4_ = (uint)bVar12 * auVar724._16_4_ | (uint)!bVar12 * auVar726._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar772._20_4_ = (uint)bVar12 * auVar724._20_4_ | (uint)!bVar12 * auVar726._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar772._24_4_ = (uint)bVar12 * auVar724._24_4_ | (uint)!bVar12 * auVar726._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar772._28_4_ = (uint)bVar12 * auVar724._28_4_ | (uint)!bVar12 * auVar726._28_4_;
          bVar12 = (bool)(bVar29 & 1);
          auVar772._32_4_ = (uint)bVar12 * auVar724._32_4_ | (uint)!bVar12 * auVar726._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar772._36_4_ = (uint)bVar12 * auVar724._36_4_ | (uint)!bVar12 * auVar726._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar772._40_4_ = (uint)bVar12 * auVar724._40_4_ | (uint)!bVar12 * auVar726._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar772._44_4_ = (uint)bVar12 * auVar724._44_4_ | (uint)!bVar12 * auVar726._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar772._48_4_ = (uint)bVar12 * auVar724._48_4_ | (uint)!bVar12 * auVar726._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar772._52_4_ = (uint)bVar12 * auVar724._52_4_ | (uint)!bVar12 * auVar726._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar772._56_4_ = (uint)bVar12 * auVar724._56_4_ | (uint)!bVar12 * auVar726._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar772._60_4_ = (uint)bVar12 * auVar724._60_4_ | (uint)!bVar12 * auVar726._60_4_;
          auVar723 = vfmadd231ps_avx512f(auVar723,auVar772,auVar717);
          auVar723 = vfmadd231ps_avx512f(auVar723,auVar718,auVar725);
          uVar47 = vcmpps_avx512f(auVar722,ZEXT1664(auVar460),2);
          auVar722 = vfmadd231ps_avx512f(auVar723,auVar719,auVar772);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar773._0_4_ = (uint)bVar12 * auVar721._0_4_ | (uint)!bVar12 * auVar722._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar773._4_4_ = (uint)bVar12 * auVar721._4_4_ | (uint)!bVar12 * auVar722._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar773._8_4_ = (uint)bVar12 * auVar721._8_4_ | (uint)!bVar12 * auVar722._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar773._12_4_ = (uint)bVar12 * auVar721._12_4_ | (uint)!bVar12 * auVar722._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar773._16_4_ = (uint)bVar12 * auVar721._16_4_ | (uint)!bVar12 * auVar722._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar773._20_4_ = (uint)bVar12 * auVar721._20_4_ | (uint)!bVar12 * auVar722._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar773._24_4_ = (uint)bVar12 * auVar721._24_4_ | (uint)!bVar12 * auVar722._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar773._28_4_ = (uint)bVar12 * auVar721._28_4_ | (uint)!bVar12 * auVar722._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar773._32_4_ = (uint)bVar12 * auVar721._32_4_ | (uint)!bVar12 * auVar722._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar773._36_4_ = (uint)bVar12 * auVar721._36_4_ | (uint)!bVar12 * auVar722._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar773._40_4_ = (uint)bVar12 * auVar721._40_4_ | (uint)!bVar12 * auVar722._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar773._44_4_ = (uint)bVar12 * auVar721._44_4_ | (uint)!bVar12 * auVar722._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar773._48_4_ = (uint)bVar12 * auVar721._48_4_ | (uint)!bVar12 * auVar722._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar773._52_4_ = (uint)bVar12 * auVar721._52_4_ | (uint)!bVar12 * auVar722._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar773._56_4_ = (uint)bVar12 * auVar721._56_4_ | (uint)!bVar12 * auVar722._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar773._60_4_ = (uint)bVar12 * auVar721._60_4_ | (uint)!bVar12 * auVar722._60_4_;
          auVar722 = vmulps_avx512f(auVar773,*(undefined1 (*) [64])ptr);
          auVar722 = vminps_avx512f(auVar722,(undefined1  [64])afVar408);
          auVar722 = vmaxps_avx512f(auVar722,(undefined1  [64])afVar409);
          auVar723 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar722,in_ZMM3);
          auVar724 = vrndscaleps_avx512f(auVar723,1);
          uVar47 = vcmpps_avx512f(auVar723,auVar724,1);
          auVar723 = vsubps_avx512f(auVar724,(undefined1  [64])afVar407);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar774._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar724._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar774._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar724._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar774._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar724._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar774._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar724._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar774._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar724._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar774._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar724._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar774._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar724._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar774._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar724._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar774._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar724._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar774._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar724._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar774._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar724._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar774._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar724._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar774._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar724._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar774._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar724._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar774._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar724._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar774._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar724._60_4_;
          auVar722 = vfmadd231ps_avx512f(auVar722,auVar774,auVar720);
          auVar722 = vfmadd231ps_avx512f(auVar722,auVar774,auVar716);
          auVar723 = vfmadd213ps_avx512f(auVar722,(undefined1  [64])afVar411,
                                         (undefined1  [64])afVar412);
          auVar724 = vmulps_avx512f(auVar722,auVar722);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar413);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar414);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,(undefined1  [64])afVar415);
          auVar723 = vfmadd213ps_avx512f(auVar723,auVar722,in_ZMM3);
          auVar722 = vfmadd213ps_avx512f(auVar723,auVar724,auVar722);
          auVar722 = vaddps_avx512f(auVar722,(undefined1  [64])afVar407);
          auVar723 = vcvttps2dq_avx512f(auVar774);
          auVar723 = vpaddd_avx512f(auVar723,auVar734);
          in_ZMM2 = vpslld_avx512f(auVar723,0x17);
          auVar722 = vmulps_avx512f(auVar722,in_ZMM2);
          *(undefined1 (*) [64])outptr = auVar722;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 4;
        } while (iVar424 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffc;
      }
      auVar460 = auVar674._0_16_;
      if ((int)(uVar427 | 1) < (int)uVar425) {
        auVar1198._8_4_ = 0x3f3504f3;
        auVar1198._0_8_ = 0x3f3504f33f3504f3;
        auVar1198._12_4_ = 0x3f3504f3;
        auVar1198._16_4_ = 0x3f3504f3;
        auVar1198._20_4_ = 0x3f3504f3;
        auVar1198._24_4_ = 0x3f3504f3;
        auVar1198._28_4_ = 0x3f3504f3;
        auVar1253._8_4_ = 0xbf800000;
        auVar1253._0_8_ = 0xbf800000bf800000;
        auVar1253._12_4_ = 0xbf800000;
        auVar1253._16_4_ = 0xbf800000;
        auVar1253._20_4_ = 0xbf800000;
        auVar1253._24_4_ = 0xbf800000;
        auVar1253._28_4_ = 0xbf800000;
        auVar1315._8_4_ = 0x3f800000;
        auVar1315._0_8_ = 0x3f8000003f800000;
        auVar1315._12_4_ = 0x3f800000;
        auVar1315._16_4_ = 0x3f800000;
        auVar1315._20_4_ = 0x3f800000;
        auVar1315._24_4_ = 0x3f800000;
        auVar1315._28_4_ = 0x3f800000;
        auVar1374._8_4_ = 0x3d9021bb;
        auVar1374._0_8_ = 0x3d9021bb3d9021bb;
        auVar1374._12_4_ = 0x3d9021bb;
        auVar1374._16_4_ = 0x3d9021bb;
        auVar1374._20_4_ = 0x3d9021bb;
        auVar1374._24_4_ = 0x3d9021bb;
        auVar1374._28_4_ = 0x3d9021bb;
        auVar1430._8_4_ = 0xbdebd1b8;
        auVar1430._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1430._12_4_ = 0xbdebd1b8;
        auVar1430._16_4_ = 0xbdebd1b8;
        auVar1430._20_4_ = 0xbdebd1b8;
        auVar1430._24_4_ = 0xbdebd1b8;
        auVar1430._28_4_ = 0xbdebd1b8;
        auVar1484._8_4_ = 0x3def251a;
        auVar1484._0_8_ = 0x3def251a3def251a;
        auVar1484._12_4_ = 0x3def251a;
        auVar1484._16_4_ = 0x3def251a;
        auVar1484._20_4_ = 0x3def251a;
        auVar1484._24_4_ = 0x3def251a;
        auVar1484._28_4_ = 0x3def251a;
        auVar1538._8_4_ = 0xbdfe5d4f;
        auVar1538._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1538._12_4_ = 0xbdfe5d4f;
        auVar1538._16_4_ = 0xbdfe5d4f;
        auVar1538._20_4_ = 0xbdfe5d4f;
        auVar1538._24_4_ = 0xbdfe5d4f;
        auVar1538._28_4_ = 0xbdfe5d4f;
        auVar1592._8_4_ = 0x3e11e9bf;
        auVar1592._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1592._12_4_ = 0x3e11e9bf;
        auVar1592._16_4_ = 0x3e11e9bf;
        auVar1592._20_4_ = 0x3e11e9bf;
        auVar1592._24_4_ = 0x3e11e9bf;
        auVar1592._28_4_ = 0x3e11e9bf;
        auVar1646._8_4_ = 0xbe2aae50;
        auVar1646._0_8_ = 0xbe2aae50be2aae50;
        auVar1646._12_4_ = 0xbe2aae50;
        auVar1646._16_4_ = 0xbe2aae50;
        auVar1646._20_4_ = 0xbe2aae50;
        auVar1646._24_4_ = 0xbe2aae50;
        auVar1646._28_4_ = 0xbe2aae50;
        auVar1700._8_4_ = 0x3e4cceac;
        auVar1700._0_8_ = 0x3e4cceac3e4cceac;
        auVar1700._12_4_ = 0x3e4cceac;
        auVar1700._16_4_ = 0x3e4cceac;
        auVar1700._20_4_ = 0x3e4cceac;
        auVar1700._24_4_ = 0x3e4cceac;
        auVar1700._28_4_ = 0x3e4cceac;
        auVar1752._8_4_ = 0xbe7ffffc;
        auVar1752._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1752._12_4_ = 0xbe7ffffc;
        auVar1752._16_4_ = 0xbe7ffffc;
        auVar1752._20_4_ = 0xbe7ffffc;
        auVar1752._24_4_ = 0xbe7ffffc;
        auVar1752._28_4_ = 0xbe7ffffc;
        auVar1803._8_4_ = 0x3eaaaaaa;
        auVar1803._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar1803._12_4_ = 0x3eaaaaaa;
        auVar1803._16_4_ = 0x3eaaaaaa;
        auVar1803._20_4_ = 0x3eaaaaaa;
        auVar1803._24_4_ = 0x3eaaaaaa;
        auVar1803._28_4_ = 0x3eaaaaaa;
        auVar677 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar678 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar442 = vxorps_avx512vl(auVar442,auVar442);
        auVar674 = vpcmpeqd_avx2(auVar674,auVar674);
        auVar460 = auVar674._0_16_;
        auVar679 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar680 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar683 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar684 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar685 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar701 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar565 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar566 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar567 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        uVar882 = uVar427;
        do {
          auVar461 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          auVar519 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
          auVar569 = vinsertf32x4_avx512vl(ZEXT1632(auVar461),auVar519,1);
          auVar226._8_4_ = 0x800000;
          auVar226._0_8_ = 0x80000000800000;
          auVar226._12_4_ = 0x800000;
          auVar226._16_4_ = 0x800000;
          auVar226._20_4_ = 0x800000;
          auVar226._24_4_ = 0x800000;
          auVar226._28_4_ = 0x800000;
          auVar568 = vmaxps_avx512vl(auVar569,auVar226);
          auVar570 = vpsrld_avx512vl(auVar568,0x17);
          auVar988._8_4_ = 0x807fffff;
          auVar988._0_8_ = 0x807fffff807fffff;
          auVar988._12_4_ = 0x807fffff;
          auVar988._16_4_ = 0x807fffff;
          auVar988._20_4_ = 0x807fffff;
          auVar988._24_4_ = 0x807fffff;
          auVar988._28_4_ = 0x807fffff;
          auVar227._8_4_ = 0x3f000000;
          auVar227._0_8_ = 0x3f0000003f000000;
          auVar227._12_4_ = 0x3f000000;
          auVar227._16_4_ = 0x3f000000;
          auVar227._20_4_ = 0x3f000000;
          auVar227._24_4_ = 0x3f000000;
          auVar227._28_4_ = 0x3f000000;
          auVar568 = vpternlogd_avx512vl(auVar568,auVar988,auVar227,0xea);
          uVar47 = vcmpps_avx512vl(auVar568,auVar1198,1);
          auVar563 = vaddps_avx512vl(auVar568,auVar1253);
          auVar568 = vaddps_avx512vl(auVar563,auVar568);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar603._0_4_ = (float)((uint)bVar12 * auVar568._0_4_ | (uint)!bVar12 * auVar563._0_4_);
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar603._4_4_ = (float)((uint)bVar12 * auVar568._4_4_ | (uint)!bVar12 * auVar563._4_4_);
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar603._8_4_ = (float)((uint)bVar12 * auVar568._8_4_ | (uint)!bVar12 * auVar563._8_4_);
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar603._12_4_ =
               (float)((uint)bVar12 * auVar568._12_4_ | (uint)!bVar12 * auVar563._12_4_);
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar603._16_4_ =
               (float)((uint)bVar12 * auVar568._16_4_ | (uint)!bVar12 * auVar563._16_4_);
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar603._20_4_ =
               (float)((uint)bVar12 * auVar568._20_4_ | (uint)!bVar12 * auVar563._20_4_);
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar603._24_4_ =
               (float)((uint)bVar12 * auVar568._24_4_ | (uint)!bVar12 * auVar563._24_4_);
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar603._28_4_ = (uint)bVar12 * auVar568._28_4_ | (uint)!bVar12 * auVar563._28_4_;
          auVar568 = vfmadd213ps_avx512vl(auVar1374,auVar603,auVar1430);
          auVar568 = vfmadd213ps_avx512vl(auVar568,auVar603,auVar1484);
          auVar568 = vfmadd213ps_avx512vl(auVar568,auVar603,auVar1538);
          auVar568 = vfmadd213ps_avx512vl(auVar568,auVar603,auVar1592);
          auVar568 = vfmadd213ps_avx512vl(auVar568,auVar603,auVar1646);
          auVar568 = vfmadd213ps_avx512vl(auVar568,auVar603,auVar1700);
          auVar1109._0_4_ = auVar603._0_4_ * auVar603._0_4_;
          auVar1109._4_4_ = auVar603._4_4_ * auVar603._4_4_;
          auVar1109._8_4_ = auVar603._8_4_ * auVar603._8_4_;
          auVar1109._12_4_ = auVar603._12_4_ * auVar603._12_4_;
          auVar1109._16_4_ = auVar603._16_4_ * auVar603._16_4_;
          auVar1109._20_4_ = auVar603._20_4_ * auVar603._20_4_;
          auVar1109._28_36_ = in_ZMM2._28_36_;
          auVar1109._24_4_ = auVar603._24_4_ * auVar603._24_4_;
          auVar568 = vfmadd213ps_avx512vl(auVar568,auVar603,auVar1752);
          auVar568 = vfmadd213ps_avx512vl(auVar568,auVar603,auVar1803);
          auVar1160._0_4_ = auVar1109._0_4_ * auVar603._0_4_;
          auVar1160._4_4_ = auVar1109._4_4_ * auVar603._4_4_;
          auVar1160._8_4_ = auVar1109._8_4_ * auVar603._8_4_;
          auVar1160._12_4_ = auVar1109._12_4_ * auVar603._12_4_;
          auVar1160._16_4_ = auVar1109._16_4_ * auVar603._16_4_;
          auVar1160._20_4_ = auVar1109._20_4_ * auVar603._20_4_;
          auVar1160._28_36_ = in_ZMM3._28_36_;
          auVar1160._24_4_ = auVar1109._24_4_ * auVar603._24_4_;
          auVar568 = vmulps_avx512vl(auVar1160._0_32_,auVar568);
          auVar228._8_4_ = 0xffffff82;
          auVar228._0_8_ = 0xffffff82ffffff82;
          auVar228._12_4_ = 0xffffff82;
          auVar228._16_4_ = 0xffffff82;
          auVar228._20_4_ = 0xffffff82;
          auVar228._24_4_ = 0xffffff82;
          auVar228._28_4_ = 0xffffff82;
          auVar570 = vpaddd_avx512vl(auVar570,auVar228);
          auVar570 = vcvtdq2ps_avx512vl(auVar570);
          auVar563 = vsubps_avx512vl(auVar570,auVar1315);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar604._0_4_ = (uint)bVar12 * auVar563._0_4_ | (uint)!bVar12 * auVar570._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar604._4_4_ = (uint)bVar12 * auVar563._4_4_ | (uint)!bVar12 * auVar570._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar604._8_4_ = (uint)bVar12 * auVar563._8_4_ | (uint)!bVar12 * auVar570._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar604._12_4_ = (uint)bVar12 * auVar563._12_4_ | (uint)!bVar12 * auVar570._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar604._16_4_ = (uint)bVar12 * auVar563._16_4_ | (uint)!bVar12 * auVar570._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar604._20_4_ = (uint)bVar12 * auVar563._20_4_ | (uint)!bVar12 * auVar570._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar604._24_4_ = (uint)bVar12 * auVar563._24_4_ | (uint)!bVar12 * auVar570._24_4_;
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar604._28_4_ = (uint)bVar12 * auVar563._28_4_ | (uint)!bVar12 * auVar570._28_4_;
          auVar568 = vfmadd231ps_avx512vl(auVar568,auVar604,auVar677);
          auVar568 = vfmsub231ps_avx512vl(auVar568,auVar678,auVar1109._0_32_);
          auVar568 = vsubps_avx(auVar568,auVar603);
          auVar568 = vfmsub231ps_avx512vl(auVar568,auVar562,auVar604);
          uVar47 = vcmpps_avx512vl(auVar569,ZEXT1632(auVar442),2);
          bVar12 = (bool)((byte)uVar47 & 1);
          bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar47 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar47 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar47 >> 6) & 1);
          bVar19 = SUB81(uVar47 >> 7,0);
          auVar372._4_4_ =
               (float)((uint)bVar13 * auVar674._4_4_ | (uint)!bVar13 * auVar568._4_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 4);
          auVar372._0_4_ =
               (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar568._0_4_) *
               *(float *)*(undefined1 (*) [64])ptr;
          auVar372._8_4_ =
               (float)((uint)bVar14 * auVar674._8_4_ | (uint)!bVar14 * auVar568._8_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 8);
          auVar372._12_4_ =
               (float)((uint)bVar15 * auVar674._12_4_ | (uint)!bVar15 * auVar568._12_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          auVar372._16_4_ =
               (float)((uint)bVar16 * auVar674._16_4_ | (uint)!bVar16 * auVar568._16_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          auVar372._20_4_ =
               (float)((uint)bVar17 * auVar674._20_4_ | (uint)!bVar17 * auVar568._20_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          auVar372._24_4_ =
               (float)((uint)bVar18 * auVar674._24_4_ | (uint)!bVar18 * auVar568._24_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          auVar372._28_4_ = (uint)bVar19 * auVar674._28_4_ | (uint)!bVar19 * auVar568._28_4_;
          auVar568 = vminps_avx512vl(auVar372,auVar679);
          auVar569 = vmaxps_avx512vl(auVar568,auVar680);
          auVar570 = vfmadd231ps_avx512vl(auVar678,auVar569,auVar683);
          auVar568 = vroundps_avx(auVar570,1);
          uVar47 = vcmpps_avx512vl(auVar570,auVar568,1);
          auVar570 = vsubps_avx512vl(auVar568,auVar1315);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar605._0_4_ = (float)((uint)bVar12 * auVar570._0_4_ | (uint)!bVar12 * auVar568._0_4_);
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar605._4_4_ = (float)((uint)bVar12 * auVar570._4_4_ | (uint)!bVar12 * auVar568._4_4_);
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar605._8_4_ = (float)((uint)bVar12 * auVar570._8_4_ | (uint)!bVar12 * auVar568._8_4_);
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar605._12_4_ =
               (float)((uint)bVar12 * auVar570._12_4_ | (uint)!bVar12 * auVar568._12_4_);
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar605._16_4_ =
               (float)((uint)bVar12 * auVar570._16_4_ | (uint)!bVar12 * auVar568._16_4_);
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar605._20_4_ =
               (float)((uint)bVar12 * auVar570._20_4_ | (uint)!bVar12 * auVar568._20_4_);
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar605._24_4_ =
               (float)((uint)bVar12 * auVar570._24_4_ | (uint)!bVar12 * auVar568._24_4_);
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar605._28_4_ =
               (float)((uint)bVar12 * auVar570._28_4_ | (uint)!bVar12 * auVar568._28_4_);
          in_ZMM3 = ZEXT3264(auVar605);
          auVar568 = vfmsub231ps_avx512vl(auVar569,auVar605,auVar562);
          auVar568 = vfnmsub231ps_avx512vl(auVar568,auVar605,auVar677);
          auVar569 = vfmadd213ps_avx512vl(auVar684,auVar568,auVar685);
          auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar701);
          auVar570 = vmulps_avx512vl(auVar568,auVar568);
          auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar565);
          auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar566);
          auVar569 = vfmadd213ps_avx512vl(auVar569,auVar568,auVar678);
          auVar568 = vfmadd213ps_avx512vl(auVar569,auVar570,auVar568);
          in_ZMM2 = ZEXT3264(auVar568);
          auVar989._0_4_ = (int)auVar605._0_4_;
          auVar989._4_4_ = (int)auVar605._4_4_;
          auVar989._8_4_ = (int)auVar605._8_4_;
          auVar989._12_4_ = (int)auVar605._12_4_;
          auVar989._16_4_ = (int)auVar605._16_4_;
          auVar989._20_4_ = (int)auVar605._20_4_;
          auVar989._24_4_ = (int)auVar605._24_4_;
          auVar989._28_4_ = (int)auVar605._28_4_;
          auVar569 = vpslld_avx2(auVar989,0x17);
          auVar569 = vpaddd_avx512vl(auVar569,auVar567);
          auVar461 = vfmadd213ps_fma(auVar569,auVar568,auVar569);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar461);
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar427 = uVar882 + 2;
          iVar424 = uVar882 + 3;
          uVar882 = uVar427;
        } while (iVar424 < (int)uVar425);
      }
      iVar424 = uVar425 - uVar427;
      if (iVar424 == 0 || (int)uVar425 < (int)uVar427) {
        return;
      }
      lVar428 = 0;
      auVar1121._8_4_ = 0xffffff82;
      auVar1121._0_8_ = 0xffffff82ffffff82;
      auVar1121._12_4_ = 0xffffff82;
      auVar1172._8_4_ = 0x3f3504f3;
      auVar1172._0_8_ = 0x3f3504f33f3504f3;
      auVar1172._12_4_ = 0x3f3504f3;
      auVar1227._8_4_ = 0xbf800000;
      auVar1227._0_8_ = 0xbf800000bf800000;
      auVar1227._12_4_ = 0xbf800000;
      auVar1292._8_4_ = 0x3f800000;
      auVar1292._0_8_ = 0x3f8000003f800000;
      auVar1292._12_4_ = 0x3f800000;
      auVar956._8_4_ = 0x3d9021bb;
      auVar956._0_8_ = 0x3d9021bb3d9021bb;
      auVar956._12_4_ = 0x3d9021bb;
      auVar1409._8_4_ = 0xbdebd1b8;
      auVar1409._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1409._12_4_ = 0xbdebd1b8;
      auVar1463._8_4_ = 0x3def251a;
      auVar1463._0_8_ = 0x3def251a3def251a;
      auVar1463._12_4_ = 0x3def251a;
      auVar1517._8_4_ = 0xbdfe5d4f;
      auVar1517._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1517._12_4_ = 0xbdfe5d4f;
      auVar1571._8_4_ = 0x3e11e9bf;
      auVar1571._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1571._12_4_ = 0x3e11e9bf;
      auVar1625._8_4_ = 0xbe2aae50;
      auVar1625._0_8_ = 0xbe2aae50be2aae50;
      auVar1625._12_4_ = 0xbe2aae50;
      auVar1679._8_4_ = 0x3e4cceac;
      auVar1679._0_8_ = 0x3e4cceac3e4cceac;
      auVar1679._12_4_ = 0x3e4cceac;
      auVar1733._8_4_ = 0xbe7ffffc;
      auVar1733._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar1733._12_4_ = 0xbe7ffffc;
      auVar1784._8_4_ = 0x3eaaaaaa;
      auVar1784._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar1784._12_4_ = 0x3eaaaaaa;
      auVar461 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar519 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar472 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar464 = vxorps_avx512vl(auVar442,auVar442);
      auVar442 = vpcmpeqd_avx(auVar460,auVar460);
      auVar460 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar465 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar466 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar469 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar470 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar523 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar443 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar445 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      do {
        auVar446 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)ptr1 + lVar428)));
        uVar47 = vcmpps_avx512vl(auVar446,auVar464,2);
        auVar94._8_4_ = 0x800000;
        auVar94._0_8_ = 0x80000000800000;
        auVar94._12_4_ = 0x800000;
        auVar446 = vmaxps_avx512vl(auVar446,auVar94);
        auVar447 = vpsrld_avx512vl(auVar446,0x17);
        auVar1037._8_4_ = 0x807fffff;
        auVar1037._0_8_ = 0x807fffff807fffff;
        auVar1037._12_4_ = 0x807fffff;
        auVar95._8_4_ = 0x3f000000;
        auVar95._0_8_ = 0x3f0000003f000000;
        auVar95._12_4_ = 0x3f000000;
        auVar446 = vpternlogd_avx512vl(auVar446,auVar1037,auVar95,0xea);
        uVar430 = vcmpps_avx512vl(auVar446,auVar1172,1);
        auVar439 = vaddps_avx512vl(auVar446,auVar1227);
        auVar446 = vaddps_avx512vl(auVar439,auVar446);
        bVar12 = (bool)((byte)uVar430 & 1);
        auVar495._0_4_ = (uint)bVar12 * auVar446._0_4_ | (uint)!bVar12 * auVar439._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar495._4_4_ = (uint)bVar12 * auVar446._4_4_ | (uint)!bVar12 * auVar439._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar495._8_4_ = (uint)bVar12 * auVar446._8_4_ | (uint)!bVar12 * auVar439._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar495._12_4_ = (uint)bVar12 * auVar446._12_4_ | (uint)!bVar12 * auVar439._12_4_;
        auVar439 = vmulps_avx512vl(auVar495,auVar495);
        auVar446 = vfmadd213ps_avx512vl(auVar956,auVar495,auVar1409);
        auVar446 = vfmadd213ps_avx512vl(auVar446,auVar495,auVar1463);
        auVar446 = vfmadd213ps_avx512vl(auVar446,auVar495,auVar1517);
        auVar446 = vfmadd213ps_avx512vl(auVar446,auVar495,auVar1571);
        auVar446 = vfmadd213ps_avx512vl(auVar446,auVar495,auVar1625);
        auVar446 = vfmadd213ps_avx512vl(auVar446,auVar495,auVar1679);
        auVar446 = vfmadd213ps_avx512vl(auVar446,auVar495,auVar1733);
        auVar446 = vfmadd213ps_avx512vl(auVar446,auVar495,auVar1784);
        auVar440 = vmulps_avx512vl(auVar439,auVar495);
        auVar1038._0_4_ = auVar440._0_4_ * auVar446._0_4_;
        auVar1038._4_4_ = auVar440._4_4_ * auVar446._4_4_;
        auVar1038._8_4_ = auVar440._8_4_ * auVar446._8_4_;
        auVar1038._12_4_ = auVar440._12_4_ * auVar446._12_4_;
        auVar446 = vpaddd_avx512vl(auVar447,auVar1121);
        auVar446 = vcvtdq2ps_avx(auVar446);
        auVar447 = vsubps_avx512vl(auVar446,auVar1292);
        bVar12 = (bool)((byte)uVar430 & 1);
        auVar496._0_4_ = (uint)bVar12 * auVar447._0_4_ | (uint)!bVar12 * auVar446._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar496._4_4_ = (uint)bVar12 * auVar447._4_4_ | (uint)!bVar12 * auVar446._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar496._8_4_ = (uint)bVar12 * auVar447._8_4_ | (uint)!bVar12 * auVar446._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar496._12_4_ = (uint)bVar12 * auVar447._12_4_ | (uint)!bVar12 * auVar446._12_4_;
        auVar446 = vfmadd231ps_avx512vl(auVar1038,auVar496,auVar461);
        auVar446 = vfmsub231ps_avx512vl(auVar446,auVar519,auVar439);
        auVar446 = vsubps_avx512vl(auVar446,auVar495);
        auVar446 = vfmsub231ps_avx512vl(auVar446,auVar472,auVar496);
        bVar12 = (bool)((byte)uVar47 & 1);
        bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
        pfVar9 = (float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
        auVar1039._0_4_ =
             (float)((uint)bVar12 * auVar442._0_4_ | (uint)!bVar12 * auVar446._0_4_) * *pfVar9;
        auVar1039._4_4_ =
             (float)((uint)bVar13 * auVar442._4_4_ | (uint)!bVar13 * auVar446._4_4_) * pfVar9[1];
        auVar1039._8_4_ =
             (float)((uint)bVar14 * auVar442._8_4_ | (uint)!bVar14 * auVar446._8_4_) * pfVar9[2];
        auVar1039._12_4_ =
             (float)((uint)bVar15 * auVar442._12_4_ | (uint)!bVar15 * auVar446._12_4_) * pfVar9[3];
        auVar446 = vminps_avx512vl(auVar1039,auVar460);
        auVar446 = vmaxps_avx512vl(auVar446,auVar465);
        auVar447 = vfmadd231ps_avx512vl(auVar519,auVar446,auVar466);
        auVar439 = vcvttps2dq_avx512vl(auVar447);
        auVar439 = vcvtdq2ps_avx512vl(auVar439);
        uVar47 = vcmpps_avx512vl(auVar447,auVar439,1);
        auVar447 = vsubps_avx512vl(auVar439,auVar1292);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar497._0_4_ = (uint)bVar12 * auVar447._0_4_ | (uint)!bVar12 * auVar439._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar497._4_4_ = (uint)bVar12 * auVar447._4_4_ | (uint)!bVar12 * auVar439._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar497._8_4_ = (uint)bVar12 * auVar447._8_4_ | (uint)!bVar12 * auVar439._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar497._12_4_ = (uint)bVar12 * auVar447._12_4_ | (uint)!bVar12 * auVar439._12_4_;
        auVar446 = vfmsub231ps_avx512vl(auVar446,auVar497,auVar472);
        auVar446 = vfnmsub231ps_avx512vl(auVar446,auVar497,auVar461);
        auVar1353._0_4_ = auVar446._0_4_ * auVar446._0_4_;
        auVar1353._4_4_ = auVar446._4_4_ * auVar446._4_4_;
        auVar1353._8_4_ = auVar446._8_4_ * auVar446._8_4_;
        auVar1353._12_4_ = auVar446._12_4_ * auVar446._12_4_;
        auVar447 = vfmadd213ps_avx512vl(auVar469,auVar446,auVar470);
        auVar447 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar523);
        auVar447 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar443);
        auVar447 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar444);
        auVar447 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar519);
        auVar446 = vfmadd213ps_avx512vl(auVar447,auVar1353,auVar446);
        auVar447 = vcvttps2dq_avx512vl(auVar497);
        auVar447 = vpslld_avx(auVar447,0x17);
        auVar447 = vpaddd_avx512vl(auVar447,auVar445);
        auVar446 = vfmadd213ps_avx512vl(auVar447,auVar446,auVar447);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar446;
        lVar428 = lVar428 + 4;
        iVar424 = iVar424 + -1;
      } while (iVar424 != 0);
      return;
    }
    if (bw == 1) {
      uVar425 = 0;
      if (0xf < (int)uVar427) {
        auVar734 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        uVar47 = vcmpps_avx512f(auVar734,ZEXT1264(ZEXT812(0)),2);
        auVar734 = vmaxps_avx512f(auVar734,(undefined1  [64])_ps512_min_norm_pos);
        auVar716 = vpsrld_avx512f(auVar734,0x17);
        auVar717 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar734 = vpternlogd_avx512f(auVar734,auVar717,(undefined1  [64])_ps512_inv_mant_mask,0xec)
        ;
        auVar718 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar716 = vpsubd_avx512f(auVar716,auVar718);
        auVar716 = vcvtdq2ps_avx512f(auVar716);
        uVar430 = vcmpps_avx512f(auVar734,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar719 = vsubps_avx512f(auVar734,(undefined1  [64])::_ps512_1);
        auVar720 = vaddps_avx512f(auVar716,(undefined1  [64])::_ps512_1);
        bVar12 = (bool)((byte)uVar430 & 1);
        auVar775._0_4_ = (uint)bVar12 * auVar716._0_4_ | (uint)!bVar12 * auVar720._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar775._4_4_ = (uint)bVar12 * auVar716._4_4_ | (uint)!bVar12 * auVar720._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar775._8_4_ = (uint)bVar12 * auVar716._8_4_ | (uint)!bVar12 * auVar720._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar775._12_4_ = (uint)bVar12 * auVar716._12_4_ | (uint)!bVar12 * auVar720._12_4_;
        bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
        auVar775._16_4_ = (uint)bVar12 * auVar716._16_4_ | (uint)!bVar12 * auVar720._16_4_;
        bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
        auVar775._20_4_ = (uint)bVar12 * auVar716._20_4_ | (uint)!bVar12 * auVar720._20_4_;
        bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
        auVar775._24_4_ = (uint)bVar12 * auVar716._24_4_ | (uint)!bVar12 * auVar720._24_4_;
        bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
        auVar775._28_4_ = (uint)bVar12 * auVar716._28_4_ | (uint)!bVar12 * auVar720._28_4_;
        bVar29 = (byte)(uVar430 >> 8);
        bVar12 = (bool)(bVar29 & 1);
        auVar775._32_4_ = (uint)bVar12 * auVar716._32_4_ | (uint)!bVar12 * auVar720._32_4_;
        bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
        auVar775._36_4_ = (uint)bVar12 * auVar716._36_4_ | (uint)!bVar12 * auVar720._36_4_;
        bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
        auVar775._40_4_ = (uint)bVar12 * auVar716._40_4_ | (uint)!bVar12 * auVar720._40_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
        auVar775._44_4_ = (uint)bVar12 * auVar716._44_4_ | (uint)!bVar12 * auVar720._44_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
        auVar775._48_4_ = (uint)bVar12 * auVar716._48_4_ | (uint)!bVar12 * auVar720._48_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
        auVar775._52_4_ = (uint)bVar12 * auVar716._52_4_ | (uint)!bVar12 * auVar720._52_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
        auVar775._56_4_ = (uint)bVar12 * auVar716._56_4_ | (uint)!bVar12 * auVar720._56_4_;
        bVar12 = SUB81(uVar430 >> 0xf,0);
        auVar775._60_4_ = (uint)bVar12 * auVar716._60_4_ | (uint)!bVar12 * auVar720._60_4_;
        auVar734 = vaddps_avx512f(auVar719,auVar734);
        bVar12 = (bool)((byte)uVar430 & 1);
        auVar776._0_4_ = (uint)bVar12 * auVar734._0_4_ | (uint)!bVar12 * auVar719._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar776._4_4_ = (uint)bVar12 * auVar734._4_4_ | (uint)!bVar12 * auVar719._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar776._8_4_ = (uint)bVar12 * auVar734._8_4_ | (uint)!bVar12 * auVar719._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar776._12_4_ = (uint)bVar12 * auVar734._12_4_ | (uint)!bVar12 * auVar719._12_4_;
        bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
        auVar776._16_4_ = (uint)bVar12 * auVar734._16_4_ | (uint)!bVar12 * auVar719._16_4_;
        bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
        auVar776._20_4_ = (uint)bVar12 * auVar734._20_4_ | (uint)!bVar12 * auVar719._20_4_;
        bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
        auVar776._24_4_ = (uint)bVar12 * auVar734._24_4_ | (uint)!bVar12 * auVar719._24_4_;
        bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
        auVar776._28_4_ = (uint)bVar12 * auVar734._28_4_ | (uint)!bVar12 * auVar719._28_4_;
        bVar12 = (bool)(bVar29 & 1);
        auVar776._32_4_ = (uint)bVar12 * auVar734._32_4_ | (uint)!bVar12 * auVar719._32_4_;
        bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
        auVar776._36_4_ = (uint)bVar12 * auVar734._36_4_ | (uint)!bVar12 * auVar719._36_4_;
        bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
        auVar776._40_4_ = (uint)bVar12 * auVar734._40_4_ | (uint)!bVar12 * auVar719._40_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
        auVar776._44_4_ = (uint)bVar12 * auVar734._44_4_ | (uint)!bVar12 * auVar719._44_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
        auVar776._48_4_ = (uint)bVar12 * auVar734._48_4_ | (uint)!bVar12 * auVar719._48_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
        auVar776._52_4_ = (uint)bVar12 * auVar734._52_4_ | (uint)!bVar12 * auVar719._52_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
        auVar776._56_4_ = (uint)bVar12 * auVar734._56_4_ | (uint)!bVar12 * auVar719._56_4_;
        bVar12 = SUB81(uVar430 >> 0xf,0);
        auVar776._60_4_ = (uint)bVar12 * auVar734._60_4_ | (uint)!bVar12 * auVar719._60_4_;
        auVar734 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_log_p0,auVar776,
                                       (undefined1  [64])_ps512_cephes_log_p1);
        auVar734 = vfmadd213ps_avx512f(auVar734,auVar776,(undefined1  [64])_ps512_cephes_log_p2);
        auVar734 = vfmadd213ps_avx512f(auVar734,auVar776,(undefined1  [64])_ps512_cephes_log_p3);
        auVar734 = vfmadd213ps_avx512f(auVar734,auVar776,(undefined1  [64])_ps512_cephes_log_p4);
        auVar734 = vfmadd213ps_avx512f(auVar734,auVar776,(undefined1  [64])_ps512_cephes_log_p5);
        auVar734 = vfmadd213ps_avx512f(auVar734,auVar776,(undefined1  [64])_ps512_cephes_log_p6);
        auVar734 = vfmadd213ps_avx512f(auVar734,auVar776,(undefined1  [64])_ps512_cephes_log_p7);
        auVar734 = vfmadd213ps_avx512f(auVar734,auVar776,(undefined1  [64])_ps512_cephes_log_p8);
        auVar716 = vmulps_avx512f(auVar776,auVar776);
        auVar719 = vmulps_avx512f(auVar716,auVar776);
        auVar734 = vmulps_avx512f(auVar719,auVar734);
        auVar734 = vfmadd231ps_avx512f(auVar734,auVar775,(undefined1  [64])_ps512_cephes_log_q1);
        auVar734 = vfmsub231ps_avx512f(auVar734,auVar717,auVar716);
        auVar734 = vsubps_avx512f(auVar734,auVar776);
        auVar734 = vfmsub231ps_avx512f(auVar734,(undefined1  [64])_ps512_cephes_log_q2,auVar775);
        auVar716 = vpternlogd_avx512f(auVar716,auVar716,auVar716,0xff);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar777._0_4_ = (uint)bVar12 * auVar716._0_4_ | (uint)!bVar12 * auVar734._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar777._4_4_ = (uint)bVar12 * auVar716._4_4_ | (uint)!bVar12 * auVar734._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar777._8_4_ = (uint)bVar12 * auVar716._8_4_ | (uint)!bVar12 * auVar734._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar777._12_4_ = (uint)bVar12 * auVar716._12_4_ | (uint)!bVar12 * auVar734._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar777._16_4_ = (uint)bVar12 * auVar716._16_4_ | (uint)!bVar12 * auVar734._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar777._20_4_ = (uint)bVar12 * auVar716._20_4_ | (uint)!bVar12 * auVar734._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar777._24_4_ = (uint)bVar12 * auVar716._24_4_ | (uint)!bVar12 * auVar734._24_4_;
        bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
        auVar777._28_4_ = (uint)bVar12 * auVar716._28_4_ | (uint)!bVar12 * auVar734._28_4_;
        bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
        auVar777._32_4_ = (uint)bVar12 * auVar716._32_4_ | (uint)!bVar12 * auVar734._32_4_;
        bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
        auVar777._36_4_ = (uint)bVar12 * auVar716._36_4_ | (uint)!bVar12 * auVar734._36_4_;
        bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
        auVar777._40_4_ = (uint)bVar12 * auVar716._40_4_ | (uint)!bVar12 * auVar734._40_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
        auVar777._44_4_ = (uint)bVar12 * auVar716._44_4_ | (uint)!bVar12 * auVar734._44_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
        auVar777._48_4_ = (uint)bVar12 * auVar716._48_4_ | (uint)!bVar12 * auVar734._48_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
        auVar777._52_4_ = (uint)bVar12 * auVar716._52_4_ | (uint)!bVar12 * auVar734._52_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
        auVar777._56_4_ = (uint)bVar12 * auVar716._56_4_ | (uint)!bVar12 * auVar734._56_4_;
        bVar12 = SUB81(uVar47 >> 0xf,0);
        auVar777._60_4_ = (uint)bVar12 * auVar716._60_4_ | (uint)!bVar12 * auVar734._60_4_;
        auVar734 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar716 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar734);
        auVar734 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar734);
        iVar424 = 0xf;
        do {
          auVar719 = vmulps_avx512f(auVar777,*(undefined1 (*) [64])ptr);
          auVar719 = vminps_avx512f(auVar719,(undefined1  [64])afVar408);
          auVar719 = vmaxps_avx512f(auVar719,(undefined1  [64])afVar409);
          auVar720 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar719,auVar717);
          auVar721 = vrndscaleps_avx512f(auVar720,1);
          uVar47 = vcmpps_avx512f(auVar720,auVar721,1);
          auVar720 = vsubps_avx512f(auVar721,(undefined1  [64])afVar407);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar778._0_4_ = (uint)bVar12 * auVar720._0_4_ | (uint)!bVar12 * auVar721._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar778._4_4_ = (uint)bVar12 * auVar720._4_4_ | (uint)!bVar12 * auVar721._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar778._8_4_ = (uint)bVar12 * auVar720._8_4_ | (uint)!bVar12 * auVar721._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar778._12_4_ = (uint)bVar12 * auVar720._12_4_ | (uint)!bVar12 * auVar721._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar778._16_4_ = (uint)bVar12 * auVar720._16_4_ | (uint)!bVar12 * auVar721._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar778._20_4_ = (uint)bVar12 * auVar720._20_4_ | (uint)!bVar12 * auVar721._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar778._24_4_ = (uint)bVar12 * auVar720._24_4_ | (uint)!bVar12 * auVar721._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar778._28_4_ = (uint)bVar12 * auVar720._28_4_ | (uint)!bVar12 * auVar721._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar778._32_4_ = (uint)bVar12 * auVar720._32_4_ | (uint)!bVar12 * auVar721._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar778._36_4_ = (uint)bVar12 * auVar720._36_4_ | (uint)!bVar12 * auVar721._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar778._40_4_ = (uint)bVar12 * auVar720._40_4_ | (uint)!bVar12 * auVar721._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar778._44_4_ = (uint)bVar12 * auVar720._44_4_ | (uint)!bVar12 * auVar721._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar778._48_4_ = (uint)bVar12 * auVar720._48_4_ | (uint)!bVar12 * auVar721._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar778._52_4_ = (uint)bVar12 * auVar720._52_4_ | (uint)!bVar12 * auVar721._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar778._56_4_ = (uint)bVar12 * auVar720._56_4_ | (uint)!bVar12 * auVar721._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar778._60_4_ = (uint)bVar12 * auVar720._60_4_ | (uint)!bVar12 * auVar721._60_4_;
          auVar719 = vfmadd231ps_avx512f(auVar719,auVar778,auVar716);
          auVar719 = vfmadd231ps_avx512f(auVar719,auVar778,auVar734);
          auVar720 = vfmadd213ps_avx512f(auVar719,(undefined1  [64])afVar411,
                                         (undefined1  [64])afVar412);
          auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar413);
          auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar414);
          auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar415);
          auVar721 = vmulps_avx512f(auVar719,auVar719);
          auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,auVar717);
          auVar719 = vfmadd213ps_avx512f(auVar720,auVar721,auVar719);
          auVar720 = vcvttps2dq_avx512f(auVar778);
          auVar719 = vaddps_avx512f(auVar719,(undefined1  [64])afVar407);
          auVar720 = vpaddd_avx512f(auVar720,auVar718);
          auVar720 = vpslld_avx512f(auVar720,0x17);
          in_ZMM14 = vmulps_avx512f(auVar719,auVar720);
          *(undefined1 (*) [64])outptr = in_ZMM14;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 0x10;
        } while (iVar424 < (int)uVar427);
        uVar425 = uVar427 & 0x7ffffff0;
      }
      if ((int)(uVar425 | 7) < (int)uVar427) {
        fVar890 = *ptr1;
        auVar990._4_4_ = fVar890;
        auVar990._0_4_ = fVar890;
        auVar990._8_4_ = fVar890;
        auVar990._12_4_ = fVar890;
        auVar990._16_4_ = fVar890;
        auVar990._20_4_ = fVar890;
        auVar990._24_4_ = fVar890;
        auVar990._28_4_ = fVar890;
        auVar229._8_4_ = 0x800000;
        auVar229._0_8_ = 0x80000000800000;
        auVar229._12_4_ = 0x800000;
        auVar229._16_4_ = 0x800000;
        auVar229._20_4_ = 0x800000;
        auVar229._24_4_ = 0x800000;
        auVar229._28_4_ = 0x800000;
        auVar674 = vmaxps_avx512vl(auVar990,auVar229);
        auVar678 = vpsrld_avx2(auVar674,0x17);
        auVar1137._8_4_ = 0x3f000000;
        auVar1137._0_8_ = 0x3f0000003f000000;
        auVar1137._12_4_ = 0x3f000000;
        auVar1137._16_4_ = 0x3f000000;
        auVar1137._20_4_ = 0x3f000000;
        auVar1137._24_4_ = 0x3f000000;
        auVar1137._28_4_ = 0x3f000000;
        auVar230._8_4_ = 0x807fffff;
        auVar230._0_8_ = 0x807fffff807fffff;
        auVar230._12_4_ = 0x807fffff;
        auVar230._16_4_ = 0x807fffff;
        auVar230._20_4_ = 0x807fffff;
        auVar230._24_4_ = 0x807fffff;
        auVar230._28_4_ = 0x807fffff;
        auVar677 = vpternlogd_avx512vl(auVar1137,auVar674,auVar230,0xf8);
        auVar231._8_4_ = 0xffffff82;
        auVar231._0_8_ = 0xffffff82ffffff82;
        auVar231._12_4_ = 0xffffff82;
        auVar231._16_4_ = 0xffffff82;
        auVar231._20_4_ = 0xffffff82;
        auVar231._24_4_ = 0xffffff82;
        auVar231._28_4_ = 0xffffff82;
        auVar674 = vpaddd_avx512vl(auVar678,auVar231);
        auVar674 = vcvtdq2ps_avx(auVar674);
        auVar232._8_4_ = 0x3f3504f3;
        auVar232._0_8_ = 0x3f3504f33f3504f3;
        auVar232._12_4_ = 0x3f3504f3;
        auVar232._16_4_ = 0x3f3504f3;
        auVar232._20_4_ = 0x3f3504f3;
        auVar232._24_4_ = 0x3f3504f3;
        auVar232._28_4_ = 0x3f3504f3;
        uVar47 = vcmpps_avx512vl(auVar677,auVar232,1);
        auVar915._8_4_ = 0xbf800000;
        auVar915._0_8_ = 0xbf800000bf800000;
        auVar915._12_4_ = 0xbf800000;
        auVar915._16_4_ = 0xbf800000;
        auVar915._20_4_ = 0xbf800000;
        auVar915._24_4_ = 0xbf800000;
        auVar915._28_4_ = 0xbf800000;
        auVar1254._0_4_ = auVar677._0_4_ + -1.0;
        auVar1254._4_4_ = auVar677._4_4_ + -1.0;
        auVar1254._8_4_ = auVar677._8_4_ + -1.0;
        auVar1254._12_4_ = auVar677._12_4_ + -1.0;
        auVar1254._16_4_ = auVar677._16_4_ + -1.0;
        auVar1254._20_4_ = auVar677._20_4_ + -1.0;
        auVar1254._24_4_ = auVar677._24_4_ + -1.0;
        auVar1254._28_4_ = auVar677._28_4_ + -1.0;
        auVar678 = vaddps_avx512vl(auVar674,auVar915);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar606._0_4_ = (uint)bVar12 * auVar678._0_4_ | (uint)!bVar12 * auVar674._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar606._4_4_ = (uint)bVar12 * auVar678._4_4_ | (uint)!bVar12 * auVar674._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar606._8_4_ = (uint)bVar12 * auVar678._8_4_ | (uint)!bVar12 * auVar674._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar606._12_4_ = (uint)bVar12 * auVar678._12_4_ | (uint)!bVar12 * auVar674._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar606._16_4_ = (uint)bVar12 * auVar678._16_4_ | (uint)!bVar12 * auVar674._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar606._20_4_ = (uint)bVar12 * auVar678._20_4_ | (uint)!bVar12 * auVar674._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar606._24_4_ = (uint)bVar12 * auVar678._24_4_ | (uint)!bVar12 * auVar674._24_4_;
        bVar12 = SUB81(uVar47 >> 7,0);
        auVar606._28_4_ = (uint)bVar12 * auVar678._28_4_ | (uint)!bVar12 * auVar674._28_4_;
        auVar674 = vaddps_avx512vl(auVar1254,auVar677);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar607._0_4_ =
             (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * (int)auVar1254._0_4_);
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar607._4_4_ =
             (float)((uint)bVar12 * auVar674._4_4_ | (uint)!bVar12 * (int)auVar1254._4_4_);
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar607._8_4_ =
             (float)((uint)bVar12 * auVar674._8_4_ | (uint)!bVar12 * (int)auVar1254._8_4_);
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar607._12_4_ =
             (float)((uint)bVar12 * auVar674._12_4_ | (uint)!bVar12 * (int)auVar1254._12_4_);
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar607._16_4_ =
             (float)((uint)bVar12 * auVar674._16_4_ | (uint)!bVar12 * (int)auVar1254._16_4_);
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar607._20_4_ =
             (float)((uint)bVar12 * auVar674._20_4_ | (uint)!bVar12 * (int)auVar1254._20_4_);
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar607._24_4_ =
             (float)((uint)bVar12 * auVar674._24_4_ | (uint)!bVar12 * (int)auVar1254._24_4_);
        bVar12 = SUB81(uVar47 >> 7,0);
        auVar607._28_4_ = (uint)bVar12 * auVar674._28_4_ | (uint)!bVar12 * (int)auVar1254._28_4_;
        auVar373._4_4_ = auVar607._4_4_ * auVar607._4_4_;
        auVar373._0_4_ = auVar607._0_4_ * auVar607._0_4_;
        auVar373._8_4_ = auVar607._8_4_ * auVar607._8_4_;
        auVar373._12_4_ = auVar607._12_4_ * auVar607._12_4_;
        auVar373._16_4_ = auVar607._16_4_ * auVar607._16_4_;
        auVar373._20_4_ = auVar607._20_4_ * auVar607._20_4_;
        auVar373._24_4_ = auVar607._24_4_ * auVar607._24_4_;
        auVar373._28_4_ = auVar677._28_4_;
        auVar1316._8_4_ = 0x3d9021bb;
        auVar1316._0_8_ = 0x3d9021bb3d9021bb;
        auVar1316._12_4_ = 0x3d9021bb;
        auVar1316._16_4_ = 0x3d9021bb;
        auVar1316._20_4_ = 0x3d9021bb;
        auVar1316._24_4_ = 0x3d9021bb;
        auVar1316._28_4_ = 0x3d9021bb;
        auVar233._8_4_ = 0xbdebd1b8;
        auVar233._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar233._12_4_ = 0xbdebd1b8;
        auVar233._16_4_ = 0xbdebd1b8;
        auVar233._20_4_ = 0xbdebd1b8;
        auVar233._24_4_ = 0xbdebd1b8;
        auVar233._28_4_ = 0xbdebd1b8;
        auVar674 = vfmadd213ps_avx512vl(auVar1316,auVar607,auVar233);
        auVar234._8_4_ = 0x3def251a;
        auVar234._0_8_ = 0x3def251a3def251a;
        auVar234._12_4_ = 0x3def251a;
        auVar234._16_4_ = 0x3def251a;
        auVar234._20_4_ = 0x3def251a;
        auVar234._24_4_ = 0x3def251a;
        auVar234._28_4_ = 0x3def251a;
        auVar674 = vfmadd213ps_avx512vl(auVar674,auVar607,auVar234);
        auVar235._8_4_ = 0xbdfe5d4f;
        auVar235._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar235._12_4_ = 0xbdfe5d4f;
        auVar235._16_4_ = 0xbdfe5d4f;
        auVar235._20_4_ = 0xbdfe5d4f;
        auVar235._24_4_ = 0xbdfe5d4f;
        auVar235._28_4_ = 0xbdfe5d4f;
        auVar674 = vfmadd213ps_avx512vl(auVar674,auVar607,auVar235);
        auVar236._8_4_ = 0x3e11e9bf;
        auVar236._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar236._12_4_ = 0x3e11e9bf;
        auVar236._16_4_ = 0x3e11e9bf;
        auVar236._20_4_ = 0x3e11e9bf;
        auVar236._24_4_ = 0x3e11e9bf;
        auVar236._28_4_ = 0x3e11e9bf;
        auVar674 = vfmadd213ps_avx512vl(auVar674,auVar607,auVar236);
        auVar237._8_4_ = 0xbe2aae50;
        auVar237._0_8_ = 0xbe2aae50be2aae50;
        auVar237._12_4_ = 0xbe2aae50;
        auVar237._16_4_ = 0xbe2aae50;
        auVar237._20_4_ = 0xbe2aae50;
        auVar237._24_4_ = 0xbe2aae50;
        auVar237._28_4_ = 0xbe2aae50;
        auVar674 = vfmadd213ps_avx512vl(auVar674,auVar607,auVar237);
        auVar238._8_4_ = 0x3e4cceac;
        auVar238._0_8_ = 0x3e4cceac3e4cceac;
        auVar238._12_4_ = 0x3e4cceac;
        auVar238._16_4_ = 0x3e4cceac;
        auVar238._20_4_ = 0x3e4cceac;
        auVar238._24_4_ = 0x3e4cceac;
        auVar238._28_4_ = 0x3e4cceac;
        auVar674 = vfmadd213ps_avx512vl(auVar674,auVar607,auVar238);
        auVar239._8_4_ = 0xbe7ffffc;
        auVar239._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar239._12_4_ = 0xbe7ffffc;
        auVar239._16_4_ = 0xbe7ffffc;
        auVar239._20_4_ = 0xbe7ffffc;
        auVar239._24_4_ = 0xbe7ffffc;
        auVar239._28_4_ = 0xbe7ffffc;
        auVar674 = vfmadd213ps_avx512vl(auVar674,auVar607,auVar239);
        auVar240._8_4_ = 0x3eaaaaaa;
        auVar240._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar240._12_4_ = 0x3eaaaaaa;
        auVar240._16_4_ = 0x3eaaaaaa;
        auVar240._20_4_ = 0x3eaaaaaa;
        auVar240._24_4_ = 0x3eaaaaaa;
        auVar240._28_4_ = 0x3eaaaaaa;
        auVar674 = vfmadd213ps_avx512vl(auVar674,auVar607,auVar240);
        auVar374._4_4_ = auVar607._4_4_ * auVar607._4_4_ * auVar607._4_4_ * auVar674._4_4_;
        auVar374._0_4_ = auVar607._0_4_ * auVar607._0_4_ * auVar607._0_4_ * auVar674._0_4_;
        auVar374._8_4_ = auVar607._8_4_ * auVar607._8_4_ * auVar607._8_4_ * auVar674._8_4_;
        auVar374._12_4_ = auVar607._12_4_ * auVar607._12_4_ * auVar607._12_4_ * auVar674._12_4_;
        auVar374._16_4_ = auVar607._16_4_ * auVar607._16_4_ * auVar607._16_4_ * auVar674._16_4_;
        auVar374._20_4_ = auVar607._20_4_ * auVar607._20_4_ * auVar607._20_4_ * auVar674._20_4_;
        auVar374._24_4_ = auVar607._24_4_ * auVar607._24_4_ * auVar607._24_4_ * auVar674._24_4_;
        auVar374._28_4_ = auVar674._28_4_;
        auVar241._8_4_ = 0xb95e8083;
        auVar241._0_8_ = 0xb95e8083b95e8083;
        auVar241._12_4_ = 0xb95e8083;
        auVar241._16_4_ = 0xb95e8083;
        auVar241._20_4_ = 0xb95e8083;
        auVar241._24_4_ = 0xb95e8083;
        auVar241._28_4_ = 0xb95e8083;
        auVar674 = vfmadd231ps_avx512vl(auVar374,auVar606,auVar241);
        auVar678 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        uVar47 = vcmpps_avx512vl(auVar990,auVar678,2);
        auVar242._8_4_ = 0x3f000000;
        auVar242._0_8_ = 0x3f0000003f000000;
        auVar242._12_4_ = 0x3f000000;
        auVar242._16_4_ = 0x3f000000;
        auVar242._20_4_ = 0x3f000000;
        auVar242._24_4_ = 0x3f000000;
        auVar242._28_4_ = 0x3f000000;
        auVar674 = vfmsub231ps_avx512vl(auVar674,auVar373,auVar242);
        auVar674 = vsubps_avx(auVar674,auVar607);
        auVar243._8_4_ = 0x3f318000;
        auVar243._0_8_ = 0x3f3180003f318000;
        auVar243._12_4_ = 0x3f318000;
        auVar243._16_4_ = 0x3f318000;
        auVar243._20_4_ = 0x3f318000;
        auVar243._24_4_ = 0x3f318000;
        auVar243._28_4_ = 0x3f318000;
        auVar677 = vfmsub231ps_avx512vl(auVar674,auVar606,auVar243);
        auVar674 = vpcmpeqd_avx2(auVar678,auVar678);
        bVar12 = (bool)((byte)uVar47 & 1);
        bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
        bVar16 = (bool)((byte)(uVar47 >> 4) & 1);
        bVar17 = (bool)((byte)(uVar47 >> 5) & 1);
        bVar18 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar1059._8_4_ = 0x42b0c0a5;
        auVar1059._0_8_ = 0x42b0c0a542b0c0a5;
        auVar1059._12_4_ = 0x42b0c0a5;
        auVar1059._16_4_ = 0x42b0c0a5;
        auVar1059._20_4_ = 0x42b0c0a5;
        auVar1059._24_4_ = 0x42b0c0a5;
        auVar1059._28_4_ = 0x42b0c0a5;
        auVar1138._8_4_ = 0xc2b0c0a5;
        auVar1138._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1138._12_4_ = 0xc2b0c0a5;
        auVar1138._16_4_ = 0xc2b0c0a5;
        auVar1138._20_4_ = 0xc2b0c0a5;
        auVar1138._24_4_ = 0xc2b0c0a5;
        auVar1138._28_4_ = 0xc2b0c0a5;
        auVar1199._8_4_ = 0x3f000000;
        auVar1199._0_8_ = 0x3f0000003f000000;
        auVar1199._12_4_ = 0x3f000000;
        auVar1199._16_4_ = 0x3f000000;
        auVar1199._20_4_ = 0x3f000000;
        auVar1199._24_4_ = 0x3f000000;
        auVar1199._28_4_ = 0x3f000000;
        auVar1255._8_4_ = 0x3fb8aa3b;
        auVar1255._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar1255._12_4_ = 0x3fb8aa3b;
        auVar1255._16_4_ = 0x3fb8aa3b;
        auVar1255._20_4_ = 0x3fb8aa3b;
        auVar1255._24_4_ = 0x3fb8aa3b;
        auVar1255._28_4_ = 0x3fb8aa3b;
        auVar1317._8_4_ = 0x3f318000;
        auVar1317._0_8_ = 0x3f3180003f318000;
        auVar1317._12_4_ = 0x3f318000;
        auVar1317._16_4_ = 0x3f318000;
        auVar1317._20_4_ = 0x3f318000;
        auVar1317._24_4_ = 0x3f318000;
        auVar1317._28_4_ = 0x3f318000;
        auVar1375._8_4_ = 0x395e8083;
        auVar1375._0_8_ = 0x395e8083395e8083;
        auVar1375._12_4_ = 0x395e8083;
        auVar1375._16_4_ = 0x395e8083;
        auVar1375._20_4_ = 0x395e8083;
        auVar1375._24_4_ = 0x395e8083;
        auVar1375._28_4_ = 0x395e8083;
        auVar1431._8_4_ = 0x39506967;
        auVar1431._0_8_ = 0x3950696739506967;
        auVar1431._12_4_ = 0x39506967;
        auVar1431._16_4_ = 0x39506967;
        auVar1431._20_4_ = 0x39506967;
        auVar1431._24_4_ = 0x39506967;
        auVar1431._28_4_ = 0x39506967;
        auVar1485._8_4_ = 0x3ab743ce;
        auVar1485._0_8_ = 0x3ab743ce3ab743ce;
        auVar1485._12_4_ = 0x3ab743ce;
        auVar1485._16_4_ = 0x3ab743ce;
        auVar1485._20_4_ = 0x3ab743ce;
        auVar1485._24_4_ = 0x3ab743ce;
        auVar1485._28_4_ = 0x3ab743ce;
        auVar1539._8_4_ = 0x3c088908;
        auVar1539._0_8_ = 0x3c0889083c088908;
        auVar1539._12_4_ = 0x3c088908;
        auVar1539._16_4_ = 0x3c088908;
        auVar1539._20_4_ = 0x3c088908;
        auVar1539._24_4_ = 0x3c088908;
        auVar1539._28_4_ = 0x3c088908;
        auVar1593._8_4_ = 0x3d2aa9c1;
        auVar1593._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar1593._12_4_ = 0x3d2aa9c1;
        auVar1593._16_4_ = 0x3d2aa9c1;
        auVar1593._20_4_ = 0x3d2aa9c1;
        auVar1593._24_4_ = 0x3d2aa9c1;
        auVar1593._28_4_ = 0x3d2aa9c1;
        auVar1647._8_4_ = 0x3e2aaaaa;
        auVar1647._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar1647._12_4_ = 0x3e2aaaaa;
        auVar1647._16_4_ = 0x3e2aaaaa;
        auVar1647._20_4_ = 0x3e2aaaaa;
        auVar1647._24_4_ = 0x3e2aaaaa;
        auVar1647._28_4_ = 0x3e2aaaaa;
        auVar1701._8_4_ = 0x3f800000;
        auVar1701._0_8_ = 0x3f8000003f800000;
        auVar1701._12_4_ = 0x3f800000;
        auVar1701._16_4_ = 0x3f800000;
        auVar1701._20_4_ = 0x3f800000;
        auVar1701._24_4_ = 0x3f800000;
        auVar1701._28_4_ = 0x3f800000;
        uVar882 = uVar425;
        do {
          auVar1775._0_4_ =
               (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar677._0_4_) *
               *(float *)*(undefined1 (*) [64])ptr;
          auVar1775._4_4_ =
               (float)((uint)bVar13 * auVar674._4_4_ | (uint)!bVar13 * auVar677._4_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 4);
          auVar1775._8_4_ =
               (float)((uint)bVar14 * auVar674._8_4_ | (uint)!bVar14 * auVar677._8_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 8);
          auVar1775._12_4_ =
               (float)((uint)bVar15 * auVar674._12_4_ | (uint)!bVar15 * auVar677._12_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          auVar1775._16_4_ =
               (float)((uint)bVar16 * auVar674._16_4_ | (uint)!bVar16 * auVar677._16_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          auVar1775._20_4_ =
               (float)((uint)bVar17 * auVar674._20_4_ | (uint)!bVar17 * auVar677._20_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          auVar1775._28_36_ = in_ZMM14._28_36_;
          auVar1775._24_4_ =
               (float)((uint)bVar18 * auVar674._24_4_ | (uint)!bVar18 * auVar677._24_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          auVar678 = vminps_avx(auVar1775._0_32_,auVar1059);
          auVar678 = vmaxps_avx(auVar678,auVar1138);
          auVar442 = vfmadd231ps_fma(auVar1199,auVar678,auVar1255);
          auVar562 = vrndscaleps_avx512vl(ZEXT1632(auVar442),1);
          uVar47 = vcmpps_avx512vl(ZEXT1632(auVar442),auVar562,1);
          auVar679 = vaddps_avx512vl(auVar562,auVar915);
          bVar19 = (bool)((byte)uVar47 & 1);
          auVar608._0_4_ = (uint)bVar19 * auVar679._0_4_ | (uint)!bVar19 * auVar562._0_4_;
          bVar19 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar608._4_4_ = (uint)bVar19 * auVar679._4_4_ | (uint)!bVar19 * auVar562._4_4_;
          bVar19 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar608._8_4_ = (uint)bVar19 * auVar679._8_4_ | (uint)!bVar19 * auVar562._8_4_;
          bVar19 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar608._12_4_ = (uint)bVar19 * auVar679._12_4_ | (uint)!bVar19 * auVar562._12_4_;
          bVar19 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar608._16_4_ = (uint)bVar19 * auVar679._16_4_ | (uint)!bVar19 * auVar562._16_4_;
          bVar19 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar608._20_4_ = (uint)bVar19 * auVar679._20_4_ | (uint)!bVar19 * auVar562._20_4_;
          bVar19 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar608._24_4_ = (uint)bVar19 * auVar679._24_4_ | (uint)!bVar19 * auVar562._24_4_;
          bVar19 = SUB81(uVar47 >> 7,0);
          auVar608._28_4_ = (uint)bVar19 * auVar679._28_4_ | (uint)!bVar19 * auVar562._28_4_;
          auVar678 = vfmsub231ps_avx512vl(auVar678,auVar608,auVar1317);
          auVar678 = vfmsub231ps_avx512vl(auVar678,auVar608,auVar1375);
          auVar442 = vfmadd213ps_fma(auVar1431,auVar678,auVar1485);
          auVar562 = vmulps_avx512vl(auVar678,auVar678);
          auVar442 = vfmadd213ps_fma(ZEXT1632(auVar442),auVar678,auVar1539);
          auVar442 = vfmadd213ps_fma(ZEXT1632(auVar442),auVar678,auVar1593);
          auVar442 = vfmadd213ps_fma(ZEXT1632(auVar442),auVar678,auVar1647);
          auVar442 = vfmadd213ps_fma(ZEXT1632(auVar442),auVar678,auVar1199);
          auVar562 = vfmadd213ps_avx512vl(ZEXT1632(auVar442),auVar562,auVar678);
          auVar678 = vcvttps2dq_avx512vl(auVar608);
          auVar678 = vpslld_avx2(auVar678,0x17);
          auVar678 = vpaddd_avx2(auVar678,auVar1701);
          auVar442 = vfmadd213ps_fma(auVar678,auVar562,auVar678);
          in_ZMM14 = ZEXT1664(auVar442);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar442);
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar425 = uVar882 + 8;
          iVar424 = uVar882 + 0xf;
          uVar882 = uVar425;
        } while (iVar424 < (int)uVar427);
      }
      if ((int)uVar427 <= (int)(uVar425 | 3)) {
        return;
      }
      fVar890 = *ptr1;
      auVar896._4_4_ = fVar890;
      auVar896._0_4_ = fVar890;
      auVar896._8_4_ = fVar890;
      auVar896._12_4_ = fVar890;
      uVar47 = vcmpps_avx512vl(auVar896,ZEXT816(0) << 0x40,2);
      auVar96._8_4_ = 0x800000;
      auVar96._0_8_ = 0x80000000800000;
      auVar96._12_4_ = 0x800000;
      auVar442 = vmaxps_avx512vl(auVar896,auVar96);
      auVar957._8_4_ = 0x3f000000;
      auVar957._0_8_ = 0x3f0000003f000000;
      auVar957._12_4_ = 0x3f000000;
      auVar97._8_4_ = 0x807fffff;
      auVar97._0_8_ = 0x807fffff807fffff;
      auVar97._12_4_ = 0x807fffff;
      auVar460 = vpternlogd_avx512vl(auVar957,auVar442,auVar97,0xf8);
      auVar442 = vpsrld_avx(auVar442,0x17);
      auVar98._8_4_ = 0xffffff82;
      auVar98._0_8_ = 0xffffff82ffffff82;
      auVar98._12_4_ = 0xffffff82;
      auVar442 = vpaddd_avx512vl(auVar442,auVar98);
      auVar442 = vcvtdq2ps_avx(auVar442);
      auVar99._8_4_ = 0x3f3504f3;
      auVar99._0_8_ = 0x3f3504f33f3504f3;
      auVar99._12_4_ = 0x3f3504f3;
      uVar430 = vcmpps_avx512vl(auVar460,auVar99,1);
      auVar897._8_4_ = 0xbf800000;
      auVar897._0_8_ = 0xbf800000bf800000;
      auVar897._12_4_ = 0xbf800000;
      auVar1122._0_4_ = auVar460._0_4_ + -1.0;
      auVar1122._4_4_ = auVar460._4_4_ + -1.0;
      auVar1122._8_4_ = auVar460._8_4_ + -1.0;
      auVar1122._12_4_ = auVar460._12_4_ + -1.0;
      auVar461 = vaddps_avx512vl(auVar442,auVar897);
      bVar12 = (bool)((byte)uVar430 & 1);
      auVar498._0_4_ = (uint)bVar12 * auVar461._0_4_ | (uint)!bVar12 * auVar442._0_4_;
      bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
      auVar498._4_4_ = (uint)bVar12 * auVar461._4_4_ | (uint)!bVar12 * auVar442._4_4_;
      bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
      auVar498._8_4_ = (uint)bVar12 * auVar461._8_4_ | (uint)!bVar12 * auVar442._8_4_;
      bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
      auVar498._12_4_ = (uint)bVar12 * auVar461._12_4_ | (uint)!bVar12 * auVar442._12_4_;
      auVar442 = vaddps_avx512vl(auVar1122,auVar460);
      bVar12 = (bool)((byte)uVar430 & 1);
      auVar499._0_4_ = (float)((uint)bVar12 * auVar442._0_4_ | (uint)!bVar12 * (int)auVar1122._0_4_)
      ;
      bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
      auVar499._4_4_ = (float)((uint)bVar12 * auVar442._4_4_ | (uint)!bVar12 * (int)auVar1122._4_4_)
      ;
      bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
      auVar499._8_4_ = (float)((uint)bVar12 * auVar442._8_4_ | (uint)!bVar12 * (int)auVar1122._8_4_)
      ;
      bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
      auVar499._12_4_ =
           (float)((uint)bVar12 * auVar442._12_4_ | (uint)!bVar12 * (int)auVar1122._12_4_);
      auVar958._0_4_ = auVar499._0_4_ * auVar499._0_4_;
      auVar958._4_4_ = auVar499._4_4_ * auVar499._4_4_;
      auVar958._8_4_ = auVar499._8_4_ * auVar499._8_4_;
      auVar958._12_4_ = auVar499._12_4_ * auVar499._12_4_;
      auVar1173._8_4_ = 0x3d9021bb;
      auVar1173._0_8_ = 0x3d9021bb3d9021bb;
      auVar1173._12_4_ = 0x3d9021bb;
      auVar100._8_4_ = 0xbdebd1b8;
      auVar100._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar100._12_4_ = 0xbdebd1b8;
      auVar442 = vfmadd213ps_avx512vl(auVar1173,auVar499,auVar100);
      auVar101._8_4_ = 0x3def251a;
      auVar101._0_8_ = 0x3def251a3def251a;
      auVar101._12_4_ = 0x3def251a;
      auVar442 = vfmadd213ps_avx512vl(auVar442,auVar499,auVar101);
      auVar102._8_4_ = 0xbdfe5d4f;
      auVar102._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar102._12_4_ = 0xbdfe5d4f;
      auVar442 = vfmadd213ps_avx512vl(auVar442,auVar499,auVar102);
      auVar103._8_4_ = 0x3e11e9bf;
      auVar103._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar103._12_4_ = 0x3e11e9bf;
      auVar442 = vfmadd213ps_avx512vl(auVar442,auVar499,auVar103);
      auVar104._8_4_ = 0xbe2aae50;
      auVar104._0_8_ = 0xbe2aae50be2aae50;
      auVar104._12_4_ = 0xbe2aae50;
      auVar442 = vfmadd213ps_avx512vl(auVar442,auVar499,auVar104);
      auVar105._8_4_ = 0x3e4cceac;
      auVar105._0_8_ = 0x3e4cceac3e4cceac;
      auVar105._12_4_ = 0x3e4cceac;
      auVar442 = vfmadd213ps_avx512vl(auVar442,auVar499,auVar105);
      auVar106._8_4_ = 0xbe7ffffc;
      auVar106._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar106._12_4_ = 0xbe7ffffc;
      auVar442 = vfmadd213ps_avx512vl(auVar442,auVar499,auVar106);
      auVar107._8_4_ = 0x3eaaaaaa;
      auVar107._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar107._12_4_ = 0x3eaaaaaa;
      auVar442 = vfmadd213ps_avx512vl(auVar442,auVar499,auVar107);
      auVar1174._0_4_ = auVar958._0_4_ * auVar499._0_4_ * auVar442._0_4_;
      auVar1174._4_4_ = auVar958._4_4_ * auVar499._4_4_ * auVar442._4_4_;
      auVar1174._8_4_ = auVar958._8_4_ * auVar499._8_4_ * auVar442._8_4_;
      auVar1174._12_4_ = auVar958._12_4_ * auVar499._12_4_ * auVar442._12_4_;
      auVar108._8_4_ = 0xb95e8083;
      auVar108._0_8_ = 0xb95e8083b95e8083;
      auVar108._12_4_ = 0xb95e8083;
      auVar442 = vfmadd231ps_avx512vl(auVar1174,auVar498,auVar108);
      auVar109._8_4_ = 0x3f000000;
      auVar109._0_8_ = 0x3f0000003f000000;
      auVar109._12_4_ = 0x3f000000;
      auVar442 = vfmsub231ps_avx512vl(auVar442,auVar958,auVar109);
      auVar442 = vsubps_avx(auVar442,auVar499);
      auVar110._8_4_ = 0x3f318000;
      auVar110._0_8_ = 0x3f3180003f318000;
      auVar110._12_4_ = 0x3f318000;
      auVar460 = vfmsub231ps_avx512vl(auVar442,auVar498,auVar110);
      auVar442 = vpcmpeqd_avx(auVar498,auVar498);
      bVar12 = (bool)((byte)uVar47 & 1);
      bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
      lVar428 = 0;
      auVar1040._8_4_ = 0x42b0c0a5;
      auVar1040._0_8_ = 0x42b0c0a542b0c0a5;
      auVar1040._12_4_ = 0x42b0c0a5;
      auVar1123._8_4_ = 0xc2b0c0a5;
      auVar1123._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar1123._12_4_ = 0xc2b0c0a5;
      auVar1175._8_4_ = 0x3f000000;
      auVar1175._0_8_ = 0x3f0000003f000000;
      auVar1175._12_4_ = 0x3f000000;
      auVar1228._8_4_ = 0x3fb8aa3b;
      auVar1228._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar1228._12_4_ = 0x3fb8aa3b;
      auVar1293._8_4_ = 0x3f318000;
      auVar1293._0_8_ = 0x3f3180003f318000;
      auVar1293._12_4_ = 0x3f318000;
      auVar1354._8_4_ = 0x395e8083;
      auVar1354._0_8_ = 0x395e8083395e8083;
      auVar1354._12_4_ = 0x395e8083;
      auVar1410._8_4_ = 0x39506967;
      auVar1410._0_8_ = 0x3950696739506967;
      auVar1410._12_4_ = 0x39506967;
      auVar1464._8_4_ = 0x3ab743ce;
      auVar1464._0_8_ = 0x3ab743ce3ab743ce;
      auVar1464._12_4_ = 0x3ab743ce;
      auVar1518._8_4_ = 0x3c088908;
      auVar1518._0_8_ = 0x3c0889083c088908;
      auVar1518._12_4_ = 0x3c088908;
      auVar1572._8_4_ = 0x3d2aa9c1;
      auVar1572._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar1572._12_4_ = 0x3d2aa9c1;
      auVar1626._8_4_ = 0x3e2aaaaa;
      auVar1626._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar1626._12_4_ = 0x3e2aaaaa;
      auVar1680._8_4_ = 0x3f800000;
      auVar1680._0_8_ = 0x3f8000003f800000;
      auVar1680._12_4_ = 0x3f800000;
      do {
        pfVar9 = (float *)(*(undefined1 (*) [64])ptr + lVar428 * 4);
        auVar1734._0_4_ =
             (float)((uint)bVar12 * auVar442._0_4_ | (uint)!bVar12 * auVar460._0_4_) * *pfVar9;
        auVar1734._4_4_ =
             (float)((uint)bVar13 * auVar442._4_4_ | (uint)!bVar13 * auVar460._4_4_) * pfVar9[1];
        auVar1734._8_4_ =
             (float)((uint)bVar14 * auVar442._8_4_ | (uint)!bVar14 * auVar460._8_4_) * pfVar9[2];
        auVar1734._12_4_ =
             (float)((uint)bVar15 * auVar442._12_4_ | (uint)!bVar15 * auVar460._12_4_) * pfVar9[3];
        auVar461 = vminps_avx(auVar1734,auVar1040);
        auVar461 = vmaxps_avx(auVar461,auVar1123);
        auVar519 = vfmadd231ps_fma(auVar1175,auVar461,auVar1228);
        auVar472 = vcvttps2dq_avx512vl(auVar519);
        auVar472 = vcvtdq2ps_avx512vl(auVar472);
        uVar47 = vcmpps_avx512vl(auVar519,auVar472,1);
        auVar519 = vaddps_avx512vl(auVar472,auVar897);
        bVar16 = (bool)((byte)uVar47 & 1);
        auVar500._0_4_ = (uint)bVar16 * auVar519._0_4_ | (uint)!bVar16 * auVar472._0_4_;
        bVar16 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar500._4_4_ = (uint)bVar16 * auVar519._4_4_ | (uint)!bVar16 * auVar472._4_4_;
        bVar16 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar500._8_4_ = (uint)bVar16 * auVar519._8_4_ | (uint)!bVar16 * auVar472._8_4_;
        bVar16 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar500._12_4_ = (uint)bVar16 * auVar519._12_4_ | (uint)!bVar16 * auVar472._12_4_;
        auVar461 = vfmsub231ps_avx512vl(auVar461,auVar500,auVar1293);
        auVar461 = vfmsub231ps_avx512vl(auVar461,auVar500,auVar1354);
        auVar1785._0_4_ = auVar461._0_4_ * auVar461._0_4_;
        auVar1785._4_4_ = auVar461._4_4_ * auVar461._4_4_;
        auVar1785._8_4_ = auVar461._8_4_ * auVar461._8_4_;
        auVar1785._12_4_ = auVar461._12_4_ * auVar461._12_4_;
        auVar519 = vfmadd213ps_avx512vl(auVar1410,auVar461,auVar1464);
        auVar519 = vfmadd213ps_avx512vl(auVar519,auVar461,auVar1518);
        auVar519 = vfmadd213ps_avx512vl(auVar519,auVar461,auVar1572);
        auVar519 = vfmadd213ps_avx512vl(auVar519,auVar461,auVar1626);
        auVar519 = vfmadd213ps_avx512vl(auVar519,auVar461,auVar1175);
        auVar519 = vfmadd213ps_avx512vl(auVar519,auVar1785,auVar461);
        auVar461 = vcvttps2dq_avx512vl(auVar500);
        auVar461 = vpslld_avx(auVar461,0x17);
        auVar461 = vpaddd_avx(auVar461,auVar1680);
        auVar461 = vfmadd213ps_avx512vl(auVar461,auVar519,auVar461);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar461;
        lVar428 = lVar428 + 4;
      } while ((int)(uVar425 + 3 + (int)lVar428) < (int)uVar427);
      return;
    }
    if (aw != 1) {
      return;
    }
    auVar674 = in_ZMM1._0_32_;
    if (iVar424 == 0x10) {
      auVar734 = *(undefined1 (*) [64])ptr;
      in_ZMM4 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
      in_ZMM5 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar716 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar717 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
      auVar718 = vpxord_avx512f(in_ZMM4,auVar716);
      auVar719 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
      auVar465 = ::_ps512_cephes_LOG2EF._0_16_;
      auVar720 = vpxord_avx512f(auVar719,auVar716);
      auVar716 = vpxord_avx512f(auVar717,auVar716);
      auVar464 = vxorps_avx512vl(auVar464,auVar464);
      in_ZMM30 = vpternlogd_avx512f(in_ZMM30,in_ZMM30,in_ZMM30,0xff);
      uVar427 = uVar425;
      do {
        auVar721 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        auVar722 = vmaxps_avx512f(auVar721,(undefined1  [64])_ps512_min_norm_pos);
        auVar723 = vpsrld_avx512f(auVar722,0x17);
        auVar722 = vpternlogd_avx512f(auVar722,in_ZMM4,(undefined1  [64])_ps512_inv_mant_mask,0xec);
        uVar47 = vcmpps_avx512f(auVar722,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar724 = vsubps_avx512f(auVar722,(undefined1  [64])afVar407);
        auVar722 = vaddps_avx512f(auVar724,auVar722);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar819._0_4_ = (uint)bVar12 * auVar722._0_4_ | (uint)!bVar12 * auVar724._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar819._4_4_ = (uint)bVar12 * auVar722._4_4_ | (uint)!bVar12 * auVar724._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar819._8_4_ = (uint)bVar12 * auVar722._8_4_ | (uint)!bVar12 * auVar724._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar819._12_4_ = (uint)bVar12 * auVar722._12_4_ | (uint)!bVar12 * auVar724._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar819._16_4_ = (uint)bVar12 * auVar722._16_4_ | (uint)!bVar12 * auVar724._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar819._20_4_ = (uint)bVar12 * auVar722._20_4_ | (uint)!bVar12 * auVar724._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar819._24_4_ = (uint)bVar12 * auVar722._24_4_ | (uint)!bVar12 * auVar724._24_4_;
        bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
        auVar819._28_4_ = (uint)bVar12 * auVar722._28_4_ | (uint)!bVar12 * auVar724._28_4_;
        bVar29 = (byte)(uVar47 >> 8);
        bVar12 = (bool)(bVar29 & 1);
        auVar819._32_4_ = (uint)bVar12 * auVar722._32_4_ | (uint)!bVar12 * auVar724._32_4_;
        bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
        auVar819._36_4_ = (uint)bVar12 * auVar722._36_4_ | (uint)!bVar12 * auVar724._36_4_;
        bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
        auVar819._40_4_ = (uint)bVar12 * auVar722._40_4_ | (uint)!bVar12 * auVar724._40_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
        auVar819._44_4_ = (uint)bVar12 * auVar722._44_4_ | (uint)!bVar12 * auVar724._44_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
        auVar819._48_4_ = (uint)bVar12 * auVar722._48_4_ | (uint)!bVar12 * auVar724._48_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
        auVar819._52_4_ = (uint)bVar12 * auVar722._52_4_ | (uint)!bVar12 * auVar724._52_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
        auVar819._56_4_ = (uint)bVar12 * auVar722._56_4_ | (uint)!bVar12 * auVar724._56_4_;
        bVar12 = SUB81(uVar47 >> 0xf,0);
        auVar819._60_4_ = (uint)bVar12 * auVar722._60_4_ | (uint)!bVar12 * auVar724._60_4_;
        auVar722 = vfmadd132ps_avx512f(auVar819,(undefined1  [64])_ps512_cephes_log_p1,
                                       (undefined1  [64])_ps512_cephes_log_p0);
        auVar722 = vfmadd213ps_avx512f(auVar722,auVar819,(undefined1  [64])afVar417);
        auVar722 = vfmadd213ps_avx512f(auVar722,auVar819,(undefined1  [64])afVar418);
        auVar722 = vfmadd213ps_avx512f(auVar722,auVar819,(undefined1  [64])afVar419);
        auVar722 = vfmadd213ps_avx512f(auVar722,auVar819,(undefined1  [64])afVar420);
        auVar722 = vfmadd213ps_avx512f(auVar722,auVar819,(undefined1  [64])afVar421);
        auVar724 = vmulps_avx512f(auVar819,auVar819);
        auVar722 = vfmadd213ps_avx512f(auVar722,auVar819,(undefined1  [64])afVar422);
        auVar722 = vfmadd213ps_avx512f(auVar722,auVar819,(undefined1  [64])afVar423);
        auVar725 = vmulps_avx512f(auVar724,auVar819);
        auVar722 = vfmadd213ps_avx512f(auVar725,auVar722,auVar819);
        auVar723 = vpsubd_avx512f(auVar723,in_ZMM5);
        auVar723 = vcvtdq2ps_avx512f(auVar723);
        auVar725 = vaddps_avx512f(auVar723,(undefined1  [64])afVar407);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar820._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar725._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar820._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar725._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar820._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar725._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar820._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar725._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar820._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar725._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar820._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar725._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar820._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar725._24_4_;
        bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
        auVar820._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar725._28_4_;
        bVar12 = (bool)(bVar29 & 1);
        auVar820._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar725._32_4_;
        bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
        auVar820._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar725._36_4_;
        bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
        auVar820._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar725._40_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
        auVar820._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar725._44_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
        auVar820._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar725._48_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
        auVar820._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar725._52_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
        auVar820._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar725._56_4_;
        bVar12 = SUB81(uVar47 >> 0xf,0);
        auVar820._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar725._60_4_;
        auVar722 = vfmadd231ps_avx512f(auVar722,auVar820,auVar717);
        auVar722 = vfmadd231ps_avx512f(auVar722,auVar718,auVar724);
        auVar722 = vfmadd231ps_avx512f(auVar722,auVar719,auVar820);
        uVar47 = vcmpps_avx512f(auVar721,ZEXT1664(auVar464),2);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar821._0_4_ = (uint)bVar12 * in_ZMM30._0_4_ | (uint)!bVar12 * auVar722._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar821._4_4_ = (uint)bVar12 * in_ZMM30._4_4_ | (uint)!bVar12 * auVar722._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar821._8_4_ = (uint)bVar12 * in_ZMM30._8_4_ | (uint)!bVar12 * auVar722._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar821._12_4_ = (uint)bVar12 * in_ZMM30._12_4_ | (uint)!bVar12 * auVar722._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar821._16_4_ = (uint)bVar12 * in_ZMM30._16_4_ | (uint)!bVar12 * auVar722._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar821._20_4_ = (uint)bVar12 * in_ZMM30._20_4_ | (uint)!bVar12 * auVar722._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar821._24_4_ = (uint)bVar12 * in_ZMM30._24_4_ | (uint)!bVar12 * auVar722._24_4_;
        bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
        auVar821._28_4_ = (uint)bVar12 * in_ZMM30._28_4_ | (uint)!bVar12 * auVar722._28_4_;
        bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
        auVar821._32_4_ = (uint)bVar12 * in_ZMM30._32_4_ | (uint)!bVar12 * auVar722._32_4_;
        bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
        auVar821._36_4_ = (uint)bVar12 * in_ZMM30._36_4_ | (uint)!bVar12 * auVar722._36_4_;
        bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
        auVar821._40_4_ = (uint)bVar12 * in_ZMM30._40_4_ | (uint)!bVar12 * auVar722._40_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
        auVar821._44_4_ = (uint)bVar12 * in_ZMM30._44_4_ | (uint)!bVar12 * auVar722._44_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
        auVar821._48_4_ = (uint)bVar12 * in_ZMM30._48_4_ | (uint)!bVar12 * auVar722._48_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
        auVar821._52_4_ = (uint)bVar12 * in_ZMM30._52_4_ | (uint)!bVar12 * auVar722._52_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
        auVar821._56_4_ = (uint)bVar12 * in_ZMM30._56_4_ | (uint)!bVar12 * auVar722._56_4_;
        bVar12 = SUB81(uVar47 >> 0xf,0);
        auVar821._60_4_ = (uint)bVar12 * in_ZMM30._60_4_ | (uint)!bVar12 * auVar722._60_4_;
        auVar721 = vmulps_avx512f(auVar821,auVar734);
        auVar721 = vminps_avx512f(auVar721,(undefined1  [64])afVar408);
        auVar721 = vmaxps_avx512f(auVar721,(undefined1  [64])afVar409);
        auVar722 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar721,in_ZMM4);
        auVar723 = vrndscaleps_avx512f(auVar722,1);
        uVar47 = vcmpps_avx512f(auVar722,auVar723,1);
        auVar722 = vsubps_avx512f(auVar723,(undefined1  [64])afVar407);
        bVar12 = (bool)((byte)uVar47 & 1);
        in_ZMM6._0_4_ = (uint)bVar12 * auVar722._0_4_ | (uint)!bVar12 * auVar723._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        in_ZMM6._4_4_ = (uint)bVar12 * auVar722._4_4_ | (uint)!bVar12 * auVar723._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        in_ZMM6._8_4_ = (uint)bVar12 * auVar722._8_4_ | (uint)!bVar12 * auVar723._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        in_ZMM6._12_4_ = (uint)bVar12 * auVar722._12_4_ | (uint)!bVar12 * auVar723._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        in_ZMM6._16_4_ = (uint)bVar12 * auVar722._16_4_ | (uint)!bVar12 * auVar723._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        in_ZMM6._20_4_ = (uint)bVar12 * auVar722._20_4_ | (uint)!bVar12 * auVar723._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        in_ZMM6._24_4_ = (uint)bVar12 * auVar722._24_4_ | (uint)!bVar12 * auVar723._24_4_;
        bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
        in_ZMM6._28_4_ = (uint)bVar12 * auVar722._28_4_ | (uint)!bVar12 * auVar723._28_4_;
        bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
        in_ZMM6._32_4_ = (uint)bVar12 * auVar722._32_4_ | (uint)!bVar12 * auVar723._32_4_;
        bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
        in_ZMM6._36_4_ = (uint)bVar12 * auVar722._36_4_ | (uint)!bVar12 * auVar723._36_4_;
        bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
        in_ZMM6._40_4_ = (uint)bVar12 * auVar722._40_4_ | (uint)!bVar12 * auVar723._40_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
        in_ZMM6._44_4_ = (uint)bVar12 * auVar722._44_4_ | (uint)!bVar12 * auVar723._44_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
        in_ZMM6._48_4_ = (uint)bVar12 * auVar722._48_4_ | (uint)!bVar12 * auVar723._48_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
        in_ZMM6._52_4_ = (uint)bVar12 * auVar722._52_4_ | (uint)!bVar12 * auVar723._52_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
        in_ZMM6._56_4_ = (uint)bVar12 * auVar722._56_4_ | (uint)!bVar12 * auVar723._56_4_;
        bVar12 = SUB81(uVar47 >> 0xf,0);
        in_ZMM6._60_4_ = (uint)bVar12 * auVar722._60_4_ | (uint)!bVar12 * auVar723._60_4_;
        auVar721 = vfmadd231ps_avx512f(auVar721,in_ZMM6,auVar720);
        auVar721 = vfmadd231ps_avx512f(auVar721,in_ZMM6,auVar716);
        auVar722 = vfmadd213ps_avx512f(auVar721,(undefined1  [64])afVar411,
                                       (undefined1  [64])afVar412);
        auVar722 = vfmadd213ps_avx512f(auVar722,auVar721,(undefined1  [64])afVar413);
        auVar722 = vfmadd213ps_avx512f(auVar722,auVar721,(undefined1  [64])afVar414);
        in_ZMM7 = vmulps_avx512f(auVar721,auVar721);
        auVar722 = vfmadd213ps_avx512f(auVar722,auVar721,(undefined1  [64])afVar415);
        auVar722 = vfmadd213ps_avx512f(auVar722,auVar721,in_ZMM4);
        auVar721 = vfmadd213ps_avx512f(auVar722,in_ZMM7,auVar721);
        auVar721 = vaddps_avx512f(auVar721,(undefined1  [64])afVar407);
        auVar722 = vcvttps2dq_avx512f(in_ZMM6);
        auVar722 = vpaddd_avx512f(auVar722,in_ZMM5);
        auVar722 = vpslld_avx512f(auVar722,0x17);
        auVar721 = vmulps_avx512f(auVar721,auVar722);
        auVar679 = auVar721._0_32_;
        *(undefined1 (*) [64])outptr = auVar721;
        ptr1 = ptr1 + 1;
        outptr = (float *)((long)outptr + 0x40);
        uVar427 = uVar427 - 1;
        auVar460 = auVar519;
        auVar674 = auVar678;
      } while (uVar427 != 0);
    }
    afVar422 = _ps512_cephes_log_p8;
    afVar421 = _ps512_cephes_log_p7;
    afVar420 = _ps512_cephes_log_p6;
    afVar419 = _ps512_cephes_log_p5;
    afVar418 = _ps512_cephes_log_p4;
    afVar417 = _ps512_cephes_log_p3;
    afVar416 = _ps512_cephes_log_p2;
    afVar415 = ::_ps512_cephes_exp_p4;
    afVar414 = ::_ps512_cephes_exp_p3;
    afVar413 = ::_ps512_cephes_exp_p2;
    afVar412 = ::_ps512_cephes_exp_p1;
    afVar411 = ::_ps512_cephes_exp_p0;
    afVar410 = ::_ps512_cephes_LOG2EF;
    afVar409 = ::_ps512_exp_lo;
    afVar408 = ::_ps512_exp_hi;
    afVar407 = ::_ps512_1;
    auVar442 = auVar674._0_16_;
    if (iVar424 == 8) {
      auVar734 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
      uVar427 = 0;
      if (1 < (int)uVar425) {
        auVar674 = ::_ps512_1._0_32_;
        in_ZMM4 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        in_ZMM5 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar716 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar717 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar718 = vpxord_avx512f(in_ZMM4,auVar716);
        auVar719 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar460 = ::_ps512_exp_lo._0_16_;
        auVar465 = ::_ps512_cephes_LOG2EF._0_16_;
        auVar720 = vpxord_avx512f(auVar719,auVar716);
        auVar716 = vpxord_avx512f(auVar717,auVar716);
        iVar426 = 1;
        auVar464 = vxorps_avx512vl(auVar464,auVar464);
        in_ZMM30 = vpternlogd_avx512f(in_ZMM30,in_ZMM30,in_ZMM30,0xff);
        do {
          auVar677 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          fVar890 = ptr1[1];
          auVar1069._4_4_ = fVar890;
          auVar1069._0_4_ = fVar890;
          auVar1069._8_4_ = fVar890;
          auVar1069._12_4_ = fVar890;
          auVar1069._16_4_ = fVar890;
          auVar1069._20_4_ = fVar890;
          auVar1069._24_4_ = fVar890;
          auVar1069._28_4_ = fVar890;
          auVar721 = vinsertf64x4_avx512f(ZEXT3264(auVar677),auVar1069,1);
          auVar722 = vmaxps_avx512f(auVar721,(undefined1  [64])_ps512_min_norm_pos);
          auVar723 = vpsrld_avx512f(auVar722,0x17);
          auVar722 = vpternlogd_avx512f(auVar722,in_ZMM4,(undefined1  [64])_ps512_inv_mant_mask,0xec
                                       );
          uVar47 = vcmpps_avx512f(auVar722,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar724 = vsubps_avx512f(auVar722,(undefined1  [64])afVar407);
          auVar722 = vaddps_avx512f(auVar724,auVar722);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar822._0_4_ = (uint)bVar12 * auVar722._0_4_ | (uint)!bVar12 * auVar724._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar822._4_4_ = (uint)bVar12 * auVar722._4_4_ | (uint)!bVar12 * auVar724._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar822._8_4_ = (uint)bVar12 * auVar722._8_4_ | (uint)!bVar12 * auVar724._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar822._12_4_ = (uint)bVar12 * auVar722._12_4_ | (uint)!bVar12 * auVar724._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar822._16_4_ = (uint)bVar12 * auVar722._16_4_ | (uint)!bVar12 * auVar724._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar822._20_4_ = (uint)bVar12 * auVar722._20_4_ | (uint)!bVar12 * auVar724._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar822._24_4_ = (uint)bVar12 * auVar722._24_4_ | (uint)!bVar12 * auVar724._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar822._28_4_ = (uint)bVar12 * auVar722._28_4_ | (uint)!bVar12 * auVar724._28_4_;
          bVar29 = (byte)(uVar47 >> 8);
          bVar12 = (bool)(bVar29 & 1);
          auVar822._32_4_ = (uint)bVar12 * auVar722._32_4_ | (uint)!bVar12 * auVar724._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar822._36_4_ = (uint)bVar12 * auVar722._36_4_ | (uint)!bVar12 * auVar724._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar822._40_4_ = (uint)bVar12 * auVar722._40_4_ | (uint)!bVar12 * auVar724._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar822._44_4_ = (uint)bVar12 * auVar722._44_4_ | (uint)!bVar12 * auVar724._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar822._48_4_ = (uint)bVar12 * auVar722._48_4_ | (uint)!bVar12 * auVar724._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar822._52_4_ = (uint)bVar12 * auVar722._52_4_ | (uint)!bVar12 * auVar724._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar822._56_4_ = (uint)bVar12 * auVar722._56_4_ | (uint)!bVar12 * auVar724._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar822._60_4_ = (uint)bVar12 * auVar722._60_4_ | (uint)!bVar12 * auVar724._60_4_;
          auVar722 = vfmadd132ps_avx512f(auVar822,(undefined1  [64])_ps512_cephes_log_p1,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar822,(undefined1  [64])afVar416);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar822,(undefined1  [64])afVar417);
          auVar724 = vmulps_avx512f(auVar822,auVar822);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar822,(undefined1  [64])afVar418);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar822,(undefined1  [64])afVar419);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar822,(undefined1  [64])afVar420);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar822,(undefined1  [64])afVar421);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar822,(undefined1  [64])afVar422);
          auVar725 = vmulps_avx512f(auVar724,auVar822);
          auVar722 = vfmadd213ps_avx512f(auVar725,auVar722,auVar822);
          auVar723 = vpsubd_avx512f(auVar723,in_ZMM5);
          auVar723 = vcvtdq2ps_avx512f(auVar723);
          auVar725 = vaddps_avx512f(auVar723,(undefined1  [64])afVar407);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar823._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar725._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar823._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar725._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar823._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar725._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar823._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar725._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar823._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar725._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar823._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar725._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar823._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar725._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar823._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar725._28_4_;
          bVar12 = (bool)(bVar29 & 1);
          auVar823._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar725._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar823._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar725._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar823._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar725._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar823._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar725._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar823._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar725._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar823._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar725._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar823._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar725._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar823._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar725._60_4_;
          uVar47 = vcmpps_avx512f(auVar721,ZEXT1664(auVar464),2);
          auVar721 = vfmadd231ps_avx512f(auVar722,auVar823,auVar717);
          auVar721 = vfmadd231ps_avx512f(auVar721,auVar718,auVar724);
          auVar721 = vfmadd231ps_avx512f(auVar721,auVar719,auVar823);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar824._0_4_ = (uint)bVar12 * in_ZMM30._0_4_ | (uint)!bVar12 * auVar721._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar824._4_4_ = (uint)bVar12 * in_ZMM30._4_4_ | (uint)!bVar12 * auVar721._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar824._8_4_ = (uint)bVar12 * in_ZMM30._8_4_ | (uint)!bVar12 * auVar721._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar824._12_4_ = (uint)bVar12 * in_ZMM30._12_4_ | (uint)!bVar12 * auVar721._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar824._16_4_ = (uint)bVar12 * in_ZMM30._16_4_ | (uint)!bVar12 * auVar721._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar824._20_4_ = (uint)bVar12 * in_ZMM30._20_4_ | (uint)!bVar12 * auVar721._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar824._24_4_ = (uint)bVar12 * in_ZMM30._24_4_ | (uint)!bVar12 * auVar721._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar824._28_4_ = (uint)bVar12 * in_ZMM30._28_4_ | (uint)!bVar12 * auVar721._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar824._32_4_ = (uint)bVar12 * in_ZMM30._32_4_ | (uint)!bVar12 * auVar721._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar824._36_4_ = (uint)bVar12 * in_ZMM30._36_4_ | (uint)!bVar12 * auVar721._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar824._40_4_ = (uint)bVar12 * in_ZMM30._40_4_ | (uint)!bVar12 * auVar721._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar824._44_4_ = (uint)bVar12 * in_ZMM30._44_4_ | (uint)!bVar12 * auVar721._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar824._48_4_ = (uint)bVar12 * in_ZMM30._48_4_ | (uint)!bVar12 * auVar721._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar824._52_4_ = (uint)bVar12 * in_ZMM30._52_4_ | (uint)!bVar12 * auVar721._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar824._56_4_ = (uint)bVar12 * in_ZMM30._56_4_ | (uint)!bVar12 * auVar721._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar824._60_4_ = (uint)bVar12 * in_ZMM30._60_4_ | (uint)!bVar12 * auVar721._60_4_;
          auVar721 = vmulps_avx512f(auVar824,auVar734);
          auVar721 = vminps_avx512f(auVar721,(undefined1  [64])afVar408);
          auVar721 = vmaxps_avx512f(auVar721,(undefined1  [64])afVar409);
          auVar722 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar721,in_ZMM4);
          auVar723 = vrndscaleps_avx512f(auVar722,1);
          uVar47 = vcmpps_avx512f(auVar722,auVar723,1);
          auVar722 = vsubps_avx512f(auVar723,(undefined1  [64])afVar407);
          bVar12 = (bool)((byte)uVar47 & 1);
          in_ZMM6._0_4_ = (uint)bVar12 * auVar722._0_4_ | (uint)!bVar12 * auVar723._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          in_ZMM6._4_4_ = (uint)bVar12 * auVar722._4_4_ | (uint)!bVar12 * auVar723._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          in_ZMM6._8_4_ = (uint)bVar12 * auVar722._8_4_ | (uint)!bVar12 * auVar723._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          in_ZMM6._12_4_ = (uint)bVar12 * auVar722._12_4_ | (uint)!bVar12 * auVar723._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          in_ZMM6._16_4_ = (uint)bVar12 * auVar722._16_4_ | (uint)!bVar12 * auVar723._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          in_ZMM6._20_4_ = (uint)bVar12 * auVar722._20_4_ | (uint)!bVar12 * auVar723._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          in_ZMM6._24_4_ = (uint)bVar12 * auVar722._24_4_ | (uint)!bVar12 * auVar723._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          in_ZMM6._28_4_ = (uint)bVar12 * auVar722._28_4_ | (uint)!bVar12 * auVar723._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          in_ZMM6._32_4_ = (uint)bVar12 * auVar722._32_4_ | (uint)!bVar12 * auVar723._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          in_ZMM6._36_4_ = (uint)bVar12 * auVar722._36_4_ | (uint)!bVar12 * auVar723._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          in_ZMM6._40_4_ = (uint)bVar12 * auVar722._40_4_ | (uint)!bVar12 * auVar723._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          in_ZMM6._44_4_ = (uint)bVar12 * auVar722._44_4_ | (uint)!bVar12 * auVar723._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          in_ZMM6._48_4_ = (uint)bVar12 * auVar722._48_4_ | (uint)!bVar12 * auVar723._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          in_ZMM6._52_4_ = (uint)bVar12 * auVar722._52_4_ | (uint)!bVar12 * auVar723._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          in_ZMM6._56_4_ = (uint)bVar12 * auVar722._56_4_ | (uint)!bVar12 * auVar723._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          in_ZMM6._60_4_ = (uint)bVar12 * auVar722._60_4_ | (uint)!bVar12 * auVar723._60_4_;
          auVar721 = vfmadd231ps_avx512f(auVar721,in_ZMM6,auVar720);
          auVar721 = vfmadd231ps_avx512f(auVar721,in_ZMM6,auVar716);
          auVar722 = vfmadd213ps_avx512f(auVar721,(undefined1  [64])afVar411,
                                         (undefined1  [64])afVar412);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar721,(undefined1  [64])afVar413);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar721,(undefined1  [64])afVar414);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar721,(undefined1  [64])afVar415);
          in_ZMM7 = vmulps_avx512f(auVar721,auVar721);
          auVar722 = vfmadd213ps_avx512f(auVar722,auVar721,in_ZMM4);
          auVar721 = vfmadd213ps_avx512f(auVar722,in_ZMM7,auVar721);
          auVar722 = vcvttps2dq_avx512f(in_ZMM6);
          auVar721 = vaddps_avx512f(auVar721,(undefined1  [64])afVar407);
          auVar722 = vpaddd_avx512f(auVar722,in_ZMM5);
          auVar722 = vpslld_avx512f(auVar722,0x17);
          auVar721 = vmulps_avx512f(auVar721,auVar722);
          auVar679 = auVar721._0_32_;
          *(undefined1 (*) [64])outptr = auVar721;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
          iVar426 = iVar426 + 2;
        } while (iVar426 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffe;
      }
      auVar442 = auVar674._0_16_;
      iVar426 = uVar425 - uVar427;
      if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
        auVar1326._8_4_ = 0xbf800000;
        auVar1326._0_8_ = 0xbf800000bf800000;
        auVar1326._12_4_ = 0xbf800000;
        auVar1326._16_4_ = 0xbf800000;
        auVar1326._20_4_ = 0xbf800000;
        auVar1326._24_4_ = 0xbf800000;
        auVar1326._28_4_ = 0xbf800000;
        in_ZMM6 = ZEXT3264(auVar1326);
        auVar1384._8_4_ = 0x3f800000;
        auVar1384._0_8_ = 0x3f8000003f800000;
        auVar1384._12_4_ = 0x3f800000;
        auVar1384._16_4_ = 0x3f800000;
        auVar1384._20_4_ = 0x3f800000;
        auVar1384._24_4_ = 0x3f800000;
        auVar1384._28_4_ = 0x3f800000;
        in_ZMM7 = ZEXT3264(auVar1384);
        auVar1440._8_4_ = 0x3d9021bb;
        auVar1440._0_8_ = 0x3d9021bb3d9021bb;
        auVar1440._12_4_ = 0x3d9021bb;
        auVar1440._16_4_ = 0x3d9021bb;
        auVar1440._20_4_ = 0x3d9021bb;
        auVar1440._24_4_ = 0x3d9021bb;
        auVar1440._28_4_ = 0x3d9021bb;
        auVar1494._8_4_ = 0xbdebd1b8;
        auVar1494._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1494._12_4_ = 0xbdebd1b8;
        auVar1494._16_4_ = 0xbdebd1b8;
        auVar1494._20_4_ = 0xbdebd1b8;
        auVar1494._24_4_ = 0xbdebd1b8;
        auVar1494._28_4_ = 0xbdebd1b8;
        auVar1548._8_4_ = 0x3def251a;
        auVar1548._0_8_ = 0x3def251a3def251a;
        auVar1548._12_4_ = 0x3def251a;
        auVar1548._16_4_ = 0x3def251a;
        auVar1548._20_4_ = 0x3def251a;
        auVar1548._24_4_ = 0x3def251a;
        auVar1548._28_4_ = 0x3def251a;
        auVar1602._8_4_ = 0xbdfe5d4f;
        auVar1602._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1602._12_4_ = 0xbdfe5d4f;
        auVar1602._16_4_ = 0xbdfe5d4f;
        auVar1602._20_4_ = 0xbdfe5d4f;
        auVar1602._24_4_ = 0xbdfe5d4f;
        auVar1602._28_4_ = 0xbdfe5d4f;
        auVar1656._8_4_ = 0x3e11e9bf;
        auVar1656._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1656._12_4_ = 0x3e11e9bf;
        auVar1656._16_4_ = 0x3e11e9bf;
        auVar1656._20_4_ = 0x3e11e9bf;
        auVar1656._24_4_ = 0x3e11e9bf;
        auVar1656._28_4_ = 0x3e11e9bf;
        auVar1710._8_4_ = 0xbe2aae50;
        auVar1710._0_8_ = 0xbe2aae50be2aae50;
        auVar1710._12_4_ = 0xbe2aae50;
        auVar1710._16_4_ = 0xbe2aae50;
        auVar1710._20_4_ = 0xbe2aae50;
        auVar1710._24_4_ = 0xbe2aae50;
        auVar1710._28_4_ = 0xbe2aae50;
        auVar1761._8_4_ = 0x3e4cceac;
        auVar1761._0_8_ = 0x3e4cceac3e4cceac;
        auVar1761._12_4_ = 0x3e4cceac;
        auVar1761._16_4_ = 0x3e4cceac;
        auVar1761._20_4_ = 0x3e4cceac;
        auVar1761._24_4_ = 0x3e4cceac;
        auVar1761._28_4_ = 0x3e4cceac;
        auVar1812._8_4_ = 0xbe7ffffc;
        auVar1812._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1812._12_4_ = 0xbe7ffffc;
        auVar1812._16_4_ = 0xbe7ffffc;
        auVar1812._20_4_ = 0xbe7ffffc;
        auVar1812._24_4_ = 0xbe7ffffc;
        auVar1812._28_4_ = 0xbe7ffffc;
        auVar677 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar678 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar680 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar460 = vxorps_avx512vl(auVar460,auVar460);
        auVar674 = vpcmpeqd_avx2(auVar674,auVar674);
        auVar442 = auVar674._0_16_;
        auVar683 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar684 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar685 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar701 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar565 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar566 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar567 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar568 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar464 = auVar568._0_16_;
        auVar569 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        in_ZMM30 = ZEXT3264(auVar569);
        do {
          auVar570 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          auVar244._8_4_ = 0x800000;
          auVar244._0_8_ = 0x80000000800000;
          auVar244._12_4_ = 0x800000;
          auVar244._16_4_ = 0x800000;
          auVar244._20_4_ = 0x800000;
          auVar244._24_4_ = 0x800000;
          auVar244._28_4_ = 0x800000;
          auVar679 = vmaxps_avx512vl(auVar570,auVar244);
          auVar563 = vpsrld_avx512vl(auVar679,0x17);
          auVar1143._8_4_ = 0x807fffff;
          auVar1143._0_8_ = 0x807fffff807fffff;
          auVar1143._12_4_ = 0x807fffff;
          auVar1143._16_4_ = 0x807fffff;
          auVar1143._20_4_ = 0x807fffff;
          auVar1143._24_4_ = 0x807fffff;
          auVar1143._28_4_ = 0x807fffff;
          auVar245._8_4_ = 0x3f000000;
          auVar245._0_8_ = 0x3f0000003f000000;
          auVar245._12_4_ = 0x3f000000;
          auVar245._16_4_ = 0x3f000000;
          auVar245._20_4_ = 0x3f000000;
          auVar245._24_4_ = 0x3f000000;
          auVar245._28_4_ = 0x3f000000;
          auVar679 = vpternlogd_avx512vl(auVar679,auVar1143,auVar245,0xea);
          auVar246._8_4_ = 0x3f3504f3;
          auVar246._0_8_ = 0x3f3504f33f3504f3;
          auVar246._12_4_ = 0x3f3504f3;
          auVar246._16_4_ = 0x3f3504f3;
          auVar246._20_4_ = 0x3f3504f3;
          auVar246._24_4_ = 0x3f3504f3;
          auVar246._28_4_ = 0x3f3504f3;
          uVar47 = vcmpps_avx512vl(auVar679,auVar246,1);
          auVar556 = vaddps_avx512vl(auVar679,auVar1326);
          auVar679 = vaddps_avx512vl(auVar556,auVar679);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar649._0_4_ = (float)((uint)bVar12 * auVar679._0_4_ | (uint)!bVar12 * auVar556._0_4_);
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar649._4_4_ = (float)((uint)bVar12 * auVar679._4_4_ | (uint)!bVar12 * auVar556._4_4_);
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar649._8_4_ = (float)((uint)bVar12 * auVar679._8_4_ | (uint)!bVar12 * auVar556._8_4_);
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar649._12_4_ =
               (float)((uint)bVar12 * auVar679._12_4_ | (uint)!bVar12 * auVar556._12_4_);
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar649._16_4_ =
               (float)((uint)bVar12 * auVar679._16_4_ | (uint)!bVar12 * auVar556._16_4_);
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar649._20_4_ =
               (float)((uint)bVar12 * auVar679._20_4_ | (uint)!bVar12 * auVar556._20_4_);
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar649._24_4_ =
               (float)((uint)bVar12 * auVar679._24_4_ | (uint)!bVar12 * auVar556._24_4_);
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar649._28_4_ = (uint)bVar12 * auVar679._28_4_ | (uint)!bVar12 * auVar556._28_4_;
          auVar679 = vfmadd213ps_avx512vl(auVar1440,auVar649,auVar1494);
          auVar679 = vfmadd213ps_avx512vl(auVar679,auVar649,auVar1548);
          auVar679 = vfmadd213ps_avx512vl(auVar679,auVar649,auVar1602);
          auVar679 = vfmadd213ps_avx512vl(auVar679,auVar649,auVar1656);
          auVar679 = vfmadd213ps_avx512vl(auVar679,auVar649,auVar1710);
          auVar1214._0_4_ = auVar649._0_4_ * auVar649._0_4_;
          auVar1214._4_4_ = auVar649._4_4_ * auVar649._4_4_;
          auVar1214._8_4_ = auVar649._8_4_ * auVar649._8_4_;
          auVar1214._12_4_ = auVar649._12_4_ * auVar649._12_4_;
          auVar1214._16_4_ = auVar649._16_4_ * auVar649._16_4_;
          auVar1214._20_4_ = auVar649._20_4_ * auVar649._20_4_;
          auVar1214._28_36_ = in_ZMM4._28_36_;
          auVar1214._24_4_ = auVar649._24_4_ * auVar649._24_4_;
          auVar679 = vfmadd213ps_avx512vl(auVar679,auVar649,auVar1761);
          auVar679 = vfmadd213ps_avx512vl(auVar679,auVar649,auVar1812);
          auVar1278._0_4_ = auVar1214._0_4_ * auVar649._0_4_;
          auVar1278._4_4_ = auVar1214._4_4_ * auVar649._4_4_;
          auVar1278._8_4_ = auVar1214._8_4_ * auVar649._8_4_;
          auVar1278._12_4_ = auVar1214._12_4_ * auVar649._12_4_;
          auVar1278._16_4_ = auVar1214._16_4_ * auVar649._16_4_;
          auVar1278._20_4_ = auVar1214._20_4_ * auVar649._20_4_;
          auVar1278._28_36_ = in_ZMM5._28_36_;
          auVar1278._24_4_ = auVar1214._24_4_ * auVar649._24_4_;
          auVar679 = vfmadd213ps_avx512vl(auVar679,auVar649,auVar677);
          auVar465 = auVar679._0_16_;
          auVar556 = vmulps_avx512vl(auVar1278._0_32_,auVar679);
          auVar247._8_4_ = 0xffffff82;
          auVar247._0_8_ = 0xffffff82ffffff82;
          auVar247._12_4_ = 0xffffff82;
          auVar247._16_4_ = 0xffffff82;
          auVar247._20_4_ = 0xffffff82;
          auVar247._24_4_ = 0xffffff82;
          auVar247._28_4_ = 0xffffff82;
          auVar679 = vpaddd_avx512vl(auVar563,auVar247);
          auVar679 = vcvtdq2ps_avx(auVar679);
          auVar563 = vsubps_avx512vl(auVar679,auVar1384);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar650._0_4_ = (uint)bVar12 * auVar563._0_4_ | (uint)!bVar12 * auVar679._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar650._4_4_ = (uint)bVar12 * auVar563._4_4_ | (uint)!bVar12 * auVar679._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar650._8_4_ = (uint)bVar12 * auVar563._8_4_ | (uint)!bVar12 * auVar679._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar650._12_4_ = (uint)bVar12 * auVar563._12_4_ | (uint)!bVar12 * auVar679._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar650._16_4_ = (uint)bVar12 * auVar563._16_4_ | (uint)!bVar12 * auVar679._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar650._20_4_ = (uint)bVar12 * auVar563._20_4_ | (uint)!bVar12 * auVar679._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar650._24_4_ = (uint)bVar12 * auVar563._24_4_ | (uint)!bVar12 * auVar679._24_4_;
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar650._28_4_ = (uint)bVar12 * auVar563._28_4_ | (uint)!bVar12 * auVar679._28_4_;
          auVar679 = vfmadd231ps_avx512vl(auVar556,auVar650,auVar678);
          auVar563 = vfmsub231ps_avx512vl(auVar679,auVar562,auVar1214._0_32_);
          auVar679 = vsubps_avx(auVar563,auVar649);
          uVar47 = vcmpps_avx512vl(auVar570,ZEXT1632(auVar460),2);
          auVar679 = vfmsub231ps_avx512vl(auVar679,auVar680,auVar650);
          bVar12 = (bool)((byte)uVar47 & 1);
          bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar47 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar47 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar378._4_4_ =
               (float)((uint)bVar13 * auVar674._4_4_ | (uint)!bVar13 * auVar679._4_4_) *
               auVar734._4_4_;
          auVar378._0_4_ =
               (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar679._0_4_) *
               auVar734._0_4_;
          auVar378._8_4_ =
               (float)((uint)bVar14 * auVar674._8_4_ | (uint)!bVar14 * auVar679._8_4_) *
               auVar734._8_4_;
          auVar378._12_4_ =
               (float)((uint)bVar15 * auVar674._12_4_ | (uint)!bVar15 * auVar679._12_4_) *
               auVar734._12_4_;
          auVar378._16_4_ =
               (float)((uint)bVar16 * auVar674._16_4_ | (uint)!bVar16 * auVar679._16_4_) *
               auVar734._16_4_;
          auVar378._20_4_ =
               (float)((uint)bVar17 * auVar674._20_4_ | (uint)!bVar17 * auVar679._20_4_) *
               auVar734._20_4_;
          auVar378._24_4_ =
               (float)((uint)bVar18 * auVar674._24_4_ | (uint)!bVar18 * auVar679._24_4_) *
               auVar734._24_4_;
          auVar378._28_4_ = auVar650._28_4_;
          auVar679 = vminps_avx512vl(auVar378,auVar683);
          auVar570 = vmaxps_avx512vl(auVar679,auVar684);
          auVar556 = vfmadd231ps_avx512vl(auVar562,auVar570,auVar685);
          auVar679 = vroundps_avx(auVar556,1);
          uVar47 = vcmpps_avx512vl(auVar556,auVar679,1);
          auVar556 = vsubps_avx512vl(auVar679,auVar1384);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar651._0_4_ = (float)((uint)bVar12 * auVar556._0_4_ | (uint)!bVar12 * auVar679._0_4_);
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar651._4_4_ = (float)((uint)bVar12 * auVar556._4_4_ | (uint)!bVar12 * auVar679._4_4_);
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar651._8_4_ = (float)((uint)bVar12 * auVar556._8_4_ | (uint)!bVar12 * auVar679._8_4_);
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar651._12_4_ =
               (float)((uint)bVar12 * auVar556._12_4_ | (uint)!bVar12 * auVar679._12_4_);
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar651._16_4_ =
               (float)((uint)bVar12 * auVar556._16_4_ | (uint)!bVar12 * auVar679._16_4_);
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar651._20_4_ =
               (float)((uint)bVar12 * auVar556._20_4_ | (uint)!bVar12 * auVar679._20_4_);
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar651._24_4_ =
               (float)((uint)bVar12 * auVar556._24_4_ | (uint)!bVar12 * auVar679._24_4_);
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar651._28_4_ =
               (float)((uint)bVar12 * auVar556._28_4_ | (uint)!bVar12 * auVar679._28_4_);
          in_ZMM4 = ZEXT3264(auVar651);
          auVar679 = vfmsub231ps_avx512vl(auVar570,auVar651,auVar680);
          auVar679 = vfnmsub231ps_avx512vl(auVar679,auVar651,auVar678);
          auVar570 = vfmadd213ps_avx512vl(auVar701,auVar679,auVar565);
          auVar570 = vfmadd213ps_avx512vl(auVar570,auVar679,auVar566);
          auVar379._4_4_ = auVar679._4_4_ * auVar679._4_4_;
          auVar379._0_4_ = auVar679._0_4_ * auVar679._0_4_;
          auVar379._8_4_ = auVar679._8_4_ * auVar679._8_4_;
          auVar379._12_4_ = auVar679._12_4_ * auVar679._12_4_;
          auVar379._16_4_ = auVar679._16_4_ * auVar679._16_4_;
          auVar379._20_4_ = auVar679._20_4_ * auVar679._20_4_;
          auVar379._24_4_ = auVar679._24_4_ * auVar679._24_4_;
          auVar379._28_4_ = auVar563._28_4_;
          in_ZMM5 = ZEXT3264(auVar379);
          auVar570 = vfmadd213ps_avx512vl(auVar570,auVar679,auVar567);
          auVar570 = vfmadd213ps_avx512vl(auVar570,auVar679,auVar568);
          auVar570 = vfmadd213ps_avx512vl(auVar570,auVar679,auVar562);
          auVar461 = vfmadd213ps_fma(auVar570,auVar379,auVar679);
          auVar1070._0_4_ = (int)auVar651._0_4_;
          auVar1070._4_4_ = (int)auVar651._4_4_;
          auVar1070._8_4_ = (int)auVar651._8_4_;
          auVar1070._12_4_ = (int)auVar651._12_4_;
          auVar1070._16_4_ = (int)auVar651._16_4_;
          auVar1070._20_4_ = (int)auVar651._20_4_;
          auVar1070._24_4_ = (int)auVar651._24_4_;
          auVar1070._28_4_ = (int)auVar651._28_4_;
          auVar679 = vpslld_avx2(auVar1070,0x17);
          auVar679 = vpaddd_avx512vl(auVar679,auVar569);
          auVar461 = vfmadd213ps_fma(auVar679,ZEXT1632(auVar461),auVar679);
          auVar679 = ZEXT1632(auVar461);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar461);
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          iVar426 = iVar426 + -1;
        } while (iVar426 != 0);
      }
    }
    afVar422 = _ps512_cephes_log_p8;
    afVar421 = _ps512_cephes_log_p7;
    afVar420 = _ps512_cephes_log_p6;
    afVar419 = _ps512_cephes_log_p5;
    afVar418 = _ps512_cephes_log_p4;
    afVar417 = _ps512_cephes_log_p3;
    afVar416 = _ps512_cephes_log_p2;
    afVar415 = ::_ps512_cephes_exp_p4;
    afVar414 = ::_ps512_cephes_exp_p3;
    afVar413 = ::_ps512_cephes_exp_p2;
    afVar412 = ::_ps512_cephes_exp_p1;
    afVar411 = ::_ps512_cephes_exp_p0;
    afVar410 = ::_ps512_cephes_LOG2EF;
    afVar409 = ::_ps512_exp_lo;
    afVar408 = ::_ps512_exp_hi;
    afVar407 = ::_ps512_1;
    if (iVar424 != 4) {
      return;
    }
    auVar734 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
    uVar427 = 0;
    if (3 < (int)uVar425) {
      auVar442 = ::_ps512_1._0_16_;
      auVar716 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
      auVar717 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar718 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar719 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
      auVar720 = vpxord_avx512f(auVar716,auVar718);
      auVar721 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
      auVar460 = ::_ps512_exp_lo._0_16_;
      auVar465 = ::_ps512_cephes_LOG2EF._0_16_;
      auVar722 = vpxord_avx512f(auVar721,auVar718);
      auVar718 = vpxord_avx512f(auVar719,auVar718);
      iVar424 = 3;
      auVar461 = vxorps_avx512vl(auVar464,auVar464);
      auVar723 = vpternlogd_avx512f(in_ZMM30,in_ZMM30,in_ZMM30,0xff);
      do {
        auVar519 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[2]));
        fVar890 = ptr1[3];
        auVar1031._4_4_ = fVar890;
        auVar1031._0_4_ = fVar890;
        auVar1031._8_4_ = fVar890;
        auVar1031._12_4_ = fVar890;
        fVar890 = *ptr1;
        auVar674 = vinsertf32x4_avx512vl(ZEXT1632(auVar519),auVar1031,1);
        auVar519 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
        auVar677 = vinsertf32x4_avx512vl
                             (ZEXT1632(CONCAT412(fVar890,CONCAT48(fVar890,CONCAT44(fVar890,fVar890))
                                                )),auVar519,1);
        auVar724 = vinsertf64x4_avx512f(ZEXT3264(auVar677),auVar674,1);
        auVar725 = vmaxps_avx512f(auVar724,(undefined1  [64])_ps512_min_norm_pos);
        auVar726 = vpsrld_avx512f(auVar725,0x17);
        auVar725 = vpternlogd_avx512f(auVar725,auVar716,(undefined1  [64])_ps512_inv_mant_mask,0xec)
        ;
        uVar47 = vcmpps_avx512f(auVar725,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar727 = vsubps_avx512f(auVar725,(undefined1  [64])afVar407);
        auVar725 = vaddps_avx512f(auVar727,auVar725);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar825._0_4_ = (uint)bVar12 * auVar725._0_4_ | (uint)!bVar12 * auVar727._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar825._4_4_ = (uint)bVar12 * auVar725._4_4_ | (uint)!bVar12 * auVar727._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar825._8_4_ = (uint)bVar12 * auVar725._8_4_ | (uint)!bVar12 * auVar727._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar825._12_4_ = (uint)bVar12 * auVar725._12_4_ | (uint)!bVar12 * auVar727._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar825._16_4_ = (uint)bVar12 * auVar725._16_4_ | (uint)!bVar12 * auVar727._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar825._20_4_ = (uint)bVar12 * auVar725._20_4_ | (uint)!bVar12 * auVar727._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar825._24_4_ = (uint)bVar12 * auVar725._24_4_ | (uint)!bVar12 * auVar727._24_4_;
        bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
        auVar825._28_4_ = (uint)bVar12 * auVar725._28_4_ | (uint)!bVar12 * auVar727._28_4_;
        bVar29 = (byte)(uVar47 >> 8);
        bVar12 = (bool)(bVar29 & 1);
        auVar825._32_4_ = (uint)bVar12 * auVar725._32_4_ | (uint)!bVar12 * auVar727._32_4_;
        bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
        auVar825._36_4_ = (uint)bVar12 * auVar725._36_4_ | (uint)!bVar12 * auVar727._36_4_;
        bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
        auVar825._40_4_ = (uint)bVar12 * auVar725._40_4_ | (uint)!bVar12 * auVar727._40_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
        auVar825._44_4_ = (uint)bVar12 * auVar725._44_4_ | (uint)!bVar12 * auVar727._44_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
        auVar825._48_4_ = (uint)bVar12 * auVar725._48_4_ | (uint)!bVar12 * auVar727._48_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
        auVar825._52_4_ = (uint)bVar12 * auVar725._52_4_ | (uint)!bVar12 * auVar727._52_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
        auVar825._56_4_ = (uint)bVar12 * auVar725._56_4_ | (uint)!bVar12 * auVar727._56_4_;
        bVar12 = SUB81(uVar47 >> 0xf,0);
        auVar825._60_4_ = (uint)bVar12 * auVar725._60_4_ | (uint)!bVar12 * auVar727._60_4_;
        auVar725 = vfmadd132ps_avx512f(auVar825,(undefined1  [64])_ps512_cephes_log_p1,
                                       (undefined1  [64])_ps512_cephes_log_p0);
        auVar725 = vfmadd213ps_avx512f(auVar725,auVar825,(undefined1  [64])afVar416);
        auVar725 = vfmadd213ps_avx512f(auVar725,auVar825,(undefined1  [64])afVar417);
        auVar727 = vmulps_avx512f(auVar825,auVar825);
        auVar725 = vfmadd213ps_avx512f(auVar725,auVar825,(undefined1  [64])afVar418);
        auVar725 = vfmadd213ps_avx512f(auVar725,auVar825,(undefined1  [64])afVar419);
        auVar725 = vfmadd213ps_avx512f(auVar725,auVar825,(undefined1  [64])afVar420);
        auVar725 = vfmadd213ps_avx512f(auVar725,auVar825,(undefined1  [64])afVar421);
        auVar725 = vfmadd213ps_avx512f(auVar725,auVar825,(undefined1  [64])afVar422);
        auVar728 = vmulps_avx512f(auVar727,auVar825);
        auVar725 = vfmadd213ps_avx512f(auVar728,auVar725,auVar825);
        auVar726 = vpsubd_avx512f(auVar726,auVar717);
        auVar726 = vcvtdq2ps_avx512f(auVar726);
        auVar728 = vaddps_avx512f(auVar726,(undefined1  [64])afVar407);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar826._0_4_ = (uint)bVar12 * auVar726._0_4_ | (uint)!bVar12 * auVar728._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar826._4_4_ = (uint)bVar12 * auVar726._4_4_ | (uint)!bVar12 * auVar728._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar826._8_4_ = (uint)bVar12 * auVar726._8_4_ | (uint)!bVar12 * auVar728._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar826._12_4_ = (uint)bVar12 * auVar726._12_4_ | (uint)!bVar12 * auVar728._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar826._16_4_ = (uint)bVar12 * auVar726._16_4_ | (uint)!bVar12 * auVar728._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar826._20_4_ = (uint)bVar12 * auVar726._20_4_ | (uint)!bVar12 * auVar728._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar826._24_4_ = (uint)bVar12 * auVar726._24_4_ | (uint)!bVar12 * auVar728._24_4_;
        bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
        auVar826._28_4_ = (uint)bVar12 * auVar726._28_4_ | (uint)!bVar12 * auVar728._28_4_;
        bVar12 = (bool)(bVar29 & 1);
        auVar826._32_4_ = (uint)bVar12 * auVar726._32_4_ | (uint)!bVar12 * auVar728._32_4_;
        bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
        auVar826._36_4_ = (uint)bVar12 * auVar726._36_4_ | (uint)!bVar12 * auVar728._36_4_;
        bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
        auVar826._40_4_ = (uint)bVar12 * auVar726._40_4_ | (uint)!bVar12 * auVar728._40_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
        auVar826._44_4_ = (uint)bVar12 * auVar726._44_4_ | (uint)!bVar12 * auVar728._44_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
        auVar826._48_4_ = (uint)bVar12 * auVar726._48_4_ | (uint)!bVar12 * auVar728._48_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
        auVar826._52_4_ = (uint)bVar12 * auVar726._52_4_ | (uint)!bVar12 * auVar728._52_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
        auVar826._56_4_ = (uint)bVar12 * auVar726._56_4_ | (uint)!bVar12 * auVar728._56_4_;
        bVar12 = SUB81(uVar47 >> 0xf,0);
        auVar826._60_4_ = (uint)bVar12 * auVar726._60_4_ | (uint)!bVar12 * auVar728._60_4_;
        uVar47 = vcmpps_avx512f(auVar724,ZEXT1664(auVar461),2);
        auVar724 = vfmadd231ps_avx512f(auVar725,auVar826,auVar719);
        auVar724 = vfmadd231ps_avx512f(auVar724,auVar720,auVar727);
        auVar724 = vfmadd231ps_avx512f(auVar724,auVar721,auVar826);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar827._0_4_ = (uint)bVar12 * auVar723._0_4_ | (uint)!bVar12 * auVar724._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar827._4_4_ = (uint)bVar12 * auVar723._4_4_ | (uint)!bVar12 * auVar724._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar827._8_4_ = (uint)bVar12 * auVar723._8_4_ | (uint)!bVar12 * auVar724._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar827._12_4_ = (uint)bVar12 * auVar723._12_4_ | (uint)!bVar12 * auVar724._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar827._16_4_ = (uint)bVar12 * auVar723._16_4_ | (uint)!bVar12 * auVar724._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar827._20_4_ = (uint)bVar12 * auVar723._20_4_ | (uint)!bVar12 * auVar724._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar827._24_4_ = (uint)bVar12 * auVar723._24_4_ | (uint)!bVar12 * auVar724._24_4_;
        bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
        auVar827._28_4_ = (uint)bVar12 * auVar723._28_4_ | (uint)!bVar12 * auVar724._28_4_;
        bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
        auVar827._32_4_ = (uint)bVar12 * auVar723._32_4_ | (uint)!bVar12 * auVar724._32_4_;
        bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
        auVar827._36_4_ = (uint)bVar12 * auVar723._36_4_ | (uint)!bVar12 * auVar724._36_4_;
        bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
        auVar827._40_4_ = (uint)bVar12 * auVar723._40_4_ | (uint)!bVar12 * auVar724._40_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
        auVar827._44_4_ = (uint)bVar12 * auVar723._44_4_ | (uint)!bVar12 * auVar724._44_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
        auVar827._48_4_ = (uint)bVar12 * auVar723._48_4_ | (uint)!bVar12 * auVar724._48_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
        auVar827._52_4_ = (uint)bVar12 * auVar723._52_4_ | (uint)!bVar12 * auVar724._52_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
        auVar827._56_4_ = (uint)bVar12 * auVar723._56_4_ | (uint)!bVar12 * auVar724._56_4_;
        bVar12 = SUB81(uVar47 >> 0xf,0);
        auVar827._60_4_ = (uint)bVar12 * auVar723._60_4_ | (uint)!bVar12 * auVar724._60_4_;
        auVar724 = vmulps_avx512f(auVar827,auVar734);
        auVar724 = vminps_avx512f(auVar724,(undefined1  [64])afVar408);
        auVar724 = vmaxps_avx512f(auVar724,(undefined1  [64])afVar409);
        auVar725 = vfmadd213ps_avx512f((undefined1  [64])afVar410,auVar724,auVar716);
        auVar726 = vrndscaleps_avx512f(auVar725,1);
        uVar47 = vcmpps_avx512f(auVar725,auVar726,1);
        auVar725 = vsubps_avx512f(auVar726,(undefined1  [64])afVar407);
        bVar12 = (bool)((byte)uVar47 & 1);
        in_ZMM6._0_4_ = (uint)bVar12 * auVar725._0_4_ | (uint)!bVar12 * auVar726._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        in_ZMM6._4_4_ = (uint)bVar12 * auVar725._4_4_ | (uint)!bVar12 * auVar726._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        in_ZMM6._8_4_ = (uint)bVar12 * auVar725._8_4_ | (uint)!bVar12 * auVar726._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        in_ZMM6._12_4_ = (uint)bVar12 * auVar725._12_4_ | (uint)!bVar12 * auVar726._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        in_ZMM6._16_4_ = (uint)bVar12 * auVar725._16_4_ | (uint)!bVar12 * auVar726._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        in_ZMM6._20_4_ = (uint)bVar12 * auVar725._20_4_ | (uint)!bVar12 * auVar726._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        in_ZMM6._24_4_ = (uint)bVar12 * auVar725._24_4_ | (uint)!bVar12 * auVar726._24_4_;
        bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
        in_ZMM6._28_4_ = (uint)bVar12 * auVar725._28_4_ | (uint)!bVar12 * auVar726._28_4_;
        bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
        in_ZMM6._32_4_ = (uint)bVar12 * auVar725._32_4_ | (uint)!bVar12 * auVar726._32_4_;
        bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
        in_ZMM6._36_4_ = (uint)bVar12 * auVar725._36_4_ | (uint)!bVar12 * auVar726._36_4_;
        bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
        in_ZMM6._40_4_ = (uint)bVar12 * auVar725._40_4_ | (uint)!bVar12 * auVar726._40_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
        in_ZMM6._44_4_ = (uint)bVar12 * auVar725._44_4_ | (uint)!bVar12 * auVar726._44_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
        in_ZMM6._48_4_ = (uint)bVar12 * auVar725._48_4_ | (uint)!bVar12 * auVar726._48_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
        in_ZMM6._52_4_ = (uint)bVar12 * auVar725._52_4_ | (uint)!bVar12 * auVar726._52_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
        in_ZMM6._56_4_ = (uint)bVar12 * auVar725._56_4_ | (uint)!bVar12 * auVar726._56_4_;
        bVar12 = SUB81(uVar47 >> 0xf,0);
        in_ZMM6._60_4_ = (uint)bVar12 * auVar725._60_4_ | (uint)!bVar12 * auVar726._60_4_;
        auVar724 = vfmadd231ps_avx512f(auVar724,in_ZMM6,auVar722);
        auVar724 = vfmadd231ps_avx512f(auVar724,in_ZMM6,auVar718);
        auVar725 = vfmadd213ps_avx512f(auVar724,(undefined1  [64])afVar411,
                                       (undefined1  [64])afVar412);
        auVar725 = vfmadd213ps_avx512f(auVar725,auVar724,(undefined1  [64])afVar413);
        auVar725 = vfmadd213ps_avx512f(auVar725,auVar724,(undefined1  [64])afVar414);
        auVar725 = vfmadd213ps_avx512f(auVar725,auVar724,(undefined1  [64])afVar415);
        in_ZMM7 = vmulps_avx512f(auVar724,auVar724);
        auVar725 = vfmadd213ps_avx512f(auVar725,auVar724,auVar716);
        auVar724 = vfmadd213ps_avx512f(auVar725,in_ZMM7,auVar724);
        auVar725 = vcvttps2dq_avx512f(in_ZMM6);
        auVar724 = vaddps_avx512f(auVar724,(undefined1  [64])afVar407);
        auVar725 = vpaddd_avx512f(auVar725,auVar717);
        auVar725 = vpslld_avx512f(auVar725,0x17);
        auVar724 = vmulps_avx512f(auVar724,auVar725);
        auVar679 = auVar724._0_32_;
        *(undefined1 (*) [64])outptr = auVar724;
        ptr1 = ptr1 + 4;
        outptr = (float *)((long)outptr + 0x40);
        iVar424 = iVar424 + 4;
      } while (iVar424 < (int)uVar425);
      uVar427 = uVar425 & 0x7ffffffc;
    }
    fVar890 = auVar734._0_4_;
    fVar891 = auVar734._4_4_;
    fVar397 = auVar734._8_4_;
    if ((int)(uVar427 | 1) < (int)uVar425) {
      auVar1441._8_4_ = 0x3f800000;
      auVar1441._0_8_ = 0x3f8000003f800000;
      auVar1441._12_4_ = 0x3f800000;
      auVar1441._16_4_ = 0x3f800000;
      auVar1441._20_4_ = 0x3f800000;
      auVar1441._24_4_ = 0x3f800000;
      auVar1441._28_4_ = 0x3f800000;
      auVar1495._8_4_ = 0x3d9021bb;
      auVar1495._0_8_ = 0x3d9021bb3d9021bb;
      auVar1495._12_4_ = 0x3d9021bb;
      auVar1495._16_4_ = 0x3d9021bb;
      auVar1495._20_4_ = 0x3d9021bb;
      auVar1495._24_4_ = 0x3d9021bb;
      auVar1495._28_4_ = 0x3d9021bb;
      auVar1549._8_4_ = 0xbdebd1b8;
      auVar1549._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1549._12_4_ = 0xbdebd1b8;
      auVar1549._16_4_ = 0xbdebd1b8;
      auVar1549._20_4_ = 0xbdebd1b8;
      auVar1549._24_4_ = 0xbdebd1b8;
      auVar1549._28_4_ = 0xbdebd1b8;
      auVar1603._8_4_ = 0x3def251a;
      auVar1603._0_8_ = 0x3def251a3def251a;
      auVar1603._12_4_ = 0x3def251a;
      auVar1603._16_4_ = 0x3def251a;
      auVar1603._20_4_ = 0x3def251a;
      auVar1603._24_4_ = 0x3def251a;
      auVar1603._28_4_ = 0x3def251a;
      auVar1657._8_4_ = 0xbdfe5d4f;
      auVar1657._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1657._12_4_ = 0xbdfe5d4f;
      auVar1657._16_4_ = 0xbdfe5d4f;
      auVar1657._20_4_ = 0xbdfe5d4f;
      auVar1657._24_4_ = 0xbdfe5d4f;
      auVar1657._28_4_ = 0xbdfe5d4f;
      auVar1711._8_4_ = 0x3e11e9bf;
      auVar1711._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1711._12_4_ = 0x3e11e9bf;
      auVar1711._16_4_ = 0x3e11e9bf;
      auVar1711._20_4_ = 0x3e11e9bf;
      auVar1711._24_4_ = 0x3e11e9bf;
      auVar1711._28_4_ = 0x3e11e9bf;
      auVar1762._8_4_ = 0xbe2aae50;
      auVar1762._0_8_ = 0xbe2aae50be2aae50;
      auVar1762._12_4_ = 0xbe2aae50;
      auVar1762._16_4_ = 0xbe2aae50;
      auVar1762._20_4_ = 0xbe2aae50;
      auVar1762._24_4_ = 0xbe2aae50;
      auVar1762._28_4_ = 0xbe2aae50;
      auVar1813._8_4_ = 0x3e4cceac;
      auVar1813._0_8_ = 0x3e4cceac3e4cceac;
      auVar1813._12_4_ = 0x3e4cceac;
      auVar1813._16_4_ = 0x3e4cceac;
      auVar1813._20_4_ = 0x3e4cceac;
      auVar1813._24_4_ = 0x3e4cceac;
      auVar1813._28_4_ = 0x3e4cceac;
      auVar677 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar678 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar562 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar680 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar683 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar460 = auVar683._0_16_;
      auVar461 = vxorps_avx512vl(auVar465,auVar465);
      auVar674 = vpcmpeqd_avx2(auVar679,auVar679);
      auVar679 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar684 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar685 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar701 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar565 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar566 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar567 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar568 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar569 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      uVar882 = uVar427;
      do {
        auVar442 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
        fVar936 = ptr1[1];
        auVar1114._4_4_ = fVar936;
        auVar1114._0_4_ = fVar936;
        auVar1114._8_4_ = fVar936;
        auVar1114._12_4_ = fVar936;
        auVar563 = vinsertf32x4_avx512vl(ZEXT1632(auVar442),auVar1114,1);
        auVar248._8_4_ = 0x800000;
        auVar248._0_8_ = 0x80000000800000;
        auVar248._12_4_ = 0x800000;
        auVar248._16_4_ = 0x800000;
        auVar248._20_4_ = 0x800000;
        auVar248._24_4_ = 0x800000;
        auVar248._28_4_ = 0x800000;
        auVar570 = vmaxps_avx512vl(auVar563,auVar248);
        auVar556 = vpsrld_avx512vl(auVar570,0x17);
        auVar1266._8_4_ = 0x807fffff;
        auVar1266._0_8_ = 0x807fffff807fffff;
        auVar1266._12_4_ = 0x807fffff;
        auVar1266._16_4_ = 0x807fffff;
        auVar1266._20_4_ = 0x807fffff;
        auVar1266._24_4_ = 0x807fffff;
        auVar1266._28_4_ = 0x807fffff;
        auVar249._8_4_ = 0x3f000000;
        auVar249._0_8_ = 0x3f0000003f000000;
        auVar249._12_4_ = 0x3f000000;
        auVar249._16_4_ = 0x3f000000;
        auVar249._20_4_ = 0x3f000000;
        auVar249._24_4_ = 0x3f000000;
        auVar249._28_4_ = 0x3f000000;
        auVar570 = vpternlogd_avx512vl(auVar570,auVar1266,auVar249,0xea);
        auVar250._8_4_ = 0x3f3504f3;
        auVar250._0_8_ = 0x3f3504f33f3504f3;
        auVar250._12_4_ = 0x3f3504f3;
        auVar250._16_4_ = 0x3f3504f3;
        auVar250._20_4_ = 0x3f3504f3;
        auVar250._24_4_ = 0x3f3504f3;
        auVar250._28_4_ = 0x3f3504f3;
        uVar47 = vcmpps_avx512vl(auVar570,auVar250,1);
        auVar251._8_4_ = 0xbf800000;
        auVar251._0_8_ = 0xbf800000bf800000;
        auVar251._12_4_ = 0xbf800000;
        auVar251._16_4_ = 0xbf800000;
        auVar251._20_4_ = 0xbf800000;
        auVar251._24_4_ = 0xbf800000;
        auVar251._28_4_ = 0xbf800000;
        auVar559 = vaddps_avx512vl(auVar570,auVar251);
        auVar570 = vaddps_avx512vl(auVar559,auVar570);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar652._0_4_ = (float)((uint)bVar12 * auVar570._0_4_ | (uint)!bVar12 * auVar559._0_4_);
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar652._4_4_ = (float)((uint)bVar12 * auVar570._4_4_ | (uint)!bVar12 * auVar559._4_4_);
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar652._8_4_ = (float)((uint)bVar12 * auVar570._8_4_ | (uint)!bVar12 * auVar559._8_4_);
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar652._12_4_ = (float)((uint)bVar12 * auVar570._12_4_ | (uint)!bVar12 * auVar559._12_4_);
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar652._16_4_ = (float)((uint)bVar12 * auVar570._16_4_ | (uint)!bVar12 * auVar559._16_4_);
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar652._20_4_ = (float)((uint)bVar12 * auVar570._20_4_ | (uint)!bVar12 * auVar559._20_4_);
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar652._24_4_ = (float)((uint)bVar12 * auVar570._24_4_ | (uint)!bVar12 * auVar559._24_4_);
        bVar12 = SUB81(uVar47 >> 7,0);
        auVar652._28_4_ = (uint)bVar12 * auVar570._28_4_ | (uint)!bVar12 * auVar559._28_4_;
        auVar570 = vfmadd213ps_avx512vl(auVar1495,auVar652,auVar1549);
        auVar570 = vfmadd213ps_avx512vl(auVar570,auVar652,auVar1603);
        auVar570 = vfmadd213ps_avx512vl(auVar570,auVar652,auVar1657);
        auVar570 = vfmadd213ps_avx512vl(auVar570,auVar652,auVar1711);
        auVar1343._0_4_ = auVar652._0_4_ * auVar652._0_4_;
        auVar1343._4_4_ = auVar652._4_4_ * auVar652._4_4_;
        auVar1343._8_4_ = auVar652._8_4_ * auVar652._8_4_;
        auVar1343._12_4_ = auVar652._12_4_ * auVar652._12_4_;
        auVar1343._16_4_ = auVar652._16_4_ * auVar652._16_4_;
        auVar1343._20_4_ = auVar652._20_4_ * auVar652._20_4_;
        auVar1343._28_36_ = in_ZMM6._28_36_;
        auVar1343._24_4_ = auVar652._24_4_ * auVar652._24_4_;
        auVar570 = vfmadd213ps_avx512vl(auVar570,auVar652,auVar1762);
        auVar570 = vfmadd213ps_avx512vl(auVar570,auVar652,auVar1813);
        auVar570 = vfmadd213ps_avx512vl(auVar570,auVar652,auVar677);
        auVar570 = vfmadd213ps_avx512vl(auVar570,auVar652,auVar678);
        auVar1399._0_4_ = auVar1343._0_4_ * auVar652._0_4_;
        auVar1399._4_4_ = auVar1343._4_4_ * auVar652._4_4_;
        auVar1399._8_4_ = auVar1343._8_4_ * auVar652._8_4_;
        auVar1399._12_4_ = auVar1343._12_4_ * auVar652._12_4_;
        auVar1399._16_4_ = auVar1343._16_4_ * auVar652._16_4_;
        auVar1399._20_4_ = auVar1343._20_4_ * auVar652._20_4_;
        auVar1399._28_36_ = in_ZMM7._28_36_;
        auVar1399._24_4_ = auVar1343._24_4_ * auVar652._24_4_;
        auVar559 = vmulps_avx512vl(auVar1399._0_32_,auVar570);
        auVar252._8_4_ = 0xffffff82;
        auVar252._0_8_ = 0xffffff82ffffff82;
        auVar252._12_4_ = 0xffffff82;
        auVar252._16_4_ = 0xffffff82;
        auVar252._20_4_ = 0xffffff82;
        auVar252._24_4_ = 0xffffff82;
        auVar252._28_4_ = 0xffffff82;
        auVar570 = vpaddd_avx512vl(auVar556,auVar252);
        auVar570 = vcvtdq2ps_avx(auVar570);
        auVar556 = vsubps_avx512vl(auVar570,auVar1441);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar653._0_4_ = (uint)bVar12 * auVar556._0_4_ | (uint)!bVar12 * auVar570._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar653._4_4_ = (uint)bVar12 * auVar556._4_4_ | (uint)!bVar12 * auVar570._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar653._8_4_ = (uint)bVar12 * auVar556._8_4_ | (uint)!bVar12 * auVar570._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar653._12_4_ = (uint)bVar12 * auVar556._12_4_ | (uint)!bVar12 * auVar570._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar653._16_4_ = (uint)bVar12 * auVar556._16_4_ | (uint)!bVar12 * auVar570._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar653._20_4_ = (uint)bVar12 * auVar556._20_4_ | (uint)!bVar12 * auVar570._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar653._24_4_ = (uint)bVar12 * auVar556._24_4_ | (uint)!bVar12 * auVar570._24_4_;
        bVar12 = SUB81(uVar47 >> 7,0);
        auVar653._28_4_ = (uint)bVar12 * auVar556._28_4_ | (uint)!bVar12 * auVar570._28_4_;
        auVar570 = vfmadd231ps_avx512vl(auVar559,auVar653,auVar562);
        auVar570 = vfmsub231ps_avx512vl(auVar570,auVar680,auVar1343._0_32_);
        in_ZMM7 = ZEXT3264(auVar570);
        uVar47 = vcmpps_avx512vl(auVar563,ZEXT1632(auVar461),2);
        auVar570 = vsubps_avx(auVar570,auVar652);
        auVar570 = vfmsub231ps_avx512vl(auVar570,auVar683,auVar653);
        bVar12 = (bool)((byte)uVar47 & 1);
        bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
        bVar16 = (bool)((byte)(uVar47 >> 4) & 1);
        bVar17 = (bool)((byte)(uVar47 >> 5) & 1);
        bVar18 = (bool)((byte)(uVar47 >> 6) & 1);
        bVar19 = SUB81(uVar47 >> 7,0);
        auVar380._4_4_ =
             (float)((uint)bVar13 * auVar674._4_4_ | (uint)!bVar13 * auVar570._4_4_) * fVar891;
        auVar380._0_4_ =
             (float)((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar570._0_4_) * fVar890;
        auVar380._8_4_ =
             (float)((uint)bVar14 * auVar674._8_4_ | (uint)!bVar14 * auVar570._8_4_) * fVar397;
        auVar380._12_4_ =
             (float)((uint)bVar15 * auVar674._12_4_ | (uint)!bVar15 * auVar570._12_4_) *
             auVar734._12_4_;
        auVar380._16_4_ =
             (float)((uint)bVar16 * auVar674._16_4_ | (uint)!bVar16 * auVar570._16_4_) * fVar890;
        auVar380._20_4_ =
             (float)((uint)bVar17 * auVar674._20_4_ | (uint)!bVar17 * auVar570._20_4_) * fVar891;
        auVar380._24_4_ =
             (float)((uint)bVar18 * auVar674._24_4_ | (uint)!bVar18 * auVar570._24_4_) * fVar397;
        auVar380._28_4_ = (uint)bVar19 * auVar674._28_4_ | (uint)!bVar19 * auVar570._28_4_;
        auVar570 = vminps_avx512vl(auVar380,auVar679);
        auVar563 = vmaxps_avx512vl(auVar570,auVar684);
        auVar556 = vfmadd231ps_avx512vl(auVar680,auVar563,auVar685);
        auVar570 = vroundps_avx(auVar556,1);
        uVar47 = vcmpps_avx512vl(auVar556,auVar570,1);
        auVar556 = vsubps_avx512vl(auVar570,auVar1441);
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar654._0_4_ = (float)((uint)bVar12 * auVar556._0_4_ | (uint)!bVar12 * auVar570._0_4_);
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar654._4_4_ = (float)((uint)bVar12 * auVar556._4_4_ | (uint)!bVar12 * auVar570._4_4_);
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar654._8_4_ = (float)((uint)bVar12 * auVar556._8_4_ | (uint)!bVar12 * auVar570._8_4_);
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar654._12_4_ = (float)((uint)bVar12 * auVar556._12_4_ | (uint)!bVar12 * auVar570._12_4_);
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar654._16_4_ = (float)((uint)bVar12 * auVar556._16_4_ | (uint)!bVar12 * auVar570._16_4_);
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar654._20_4_ = (float)((uint)bVar12 * auVar556._20_4_ | (uint)!bVar12 * auVar570._20_4_);
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar654._24_4_ = (float)((uint)bVar12 * auVar556._24_4_ | (uint)!bVar12 * auVar570._24_4_);
        bVar12 = SUB81(uVar47 >> 7,0);
        auVar654._28_4_ = (float)((uint)bVar12 * auVar556._28_4_ | (uint)!bVar12 * auVar570._28_4_);
        auVar570 = vfmsub231ps_avx512vl(auVar563,auVar654,auVar683);
        auVar570 = vfnmsub231ps_avx512vl(auVar570,auVar654,auVar562);
        auVar563 = vfmadd213ps_avx512vl(auVar701,auVar570,auVar565);
        auVar381._4_4_ = auVar570._4_4_ * auVar570._4_4_;
        auVar381._0_4_ = auVar570._0_4_ * auVar570._0_4_;
        auVar381._8_4_ = auVar570._8_4_ * auVar570._8_4_;
        auVar381._12_4_ = auVar570._12_4_ * auVar570._12_4_;
        auVar381._16_4_ = auVar570._16_4_ * auVar570._16_4_;
        auVar381._20_4_ = auVar570._20_4_ * auVar570._20_4_;
        auVar381._24_4_ = auVar570._24_4_ * auVar570._24_4_;
        auVar381._28_4_ = in_ZMM6._28_4_;
        in_ZMM6 = ZEXT3264(auVar381);
        auVar563 = vfmadd213ps_avx512vl(auVar563,auVar570,auVar566);
        auVar563 = vfmadd213ps_avx512vl(auVar563,auVar570,auVar567);
        auVar563 = vfmadd213ps_avx512vl(auVar563,auVar570,auVar568);
        auVar563 = vfmadd213ps_avx512vl(auVar563,auVar570,auVar680);
        auVar442 = vfmadd213ps_fma(auVar563,auVar381,auVar570);
        auVar1144._0_4_ = (int)auVar654._0_4_;
        auVar1144._4_4_ = (int)auVar654._4_4_;
        auVar1144._8_4_ = (int)auVar654._8_4_;
        auVar1144._12_4_ = (int)auVar654._12_4_;
        auVar1144._16_4_ = (int)auVar654._16_4_;
        auVar1144._20_4_ = (int)auVar654._20_4_;
        auVar1144._24_4_ = (int)auVar654._24_4_;
        auVar1144._28_4_ = (int)auVar654._28_4_;
        auVar570 = vpslld_avx2(auVar1144,0x17);
        auVar570 = vpaddd_avx512vl(auVar570,auVar569);
        auVar442 = vfmadd213ps_fma(auVar570,ZEXT1632(auVar442),auVar570);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar442);
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar427 = uVar882 + 2;
        iVar424 = uVar882 + 3;
        uVar882 = uVar427;
        auVar442 = auVar734._0_16_;
      } while (iVar424 < (int)uVar425);
    }
    if ((int)uVar425 <= (int)uVar427) {
      return;
    }
    lVar428 = 0;
    auVar1305._8_4_ = 0xbf800000;
    auVar1305._0_8_ = 0xbf800000bf800000;
    auVar1305._12_4_ = 0xbf800000;
    auVar1364._8_4_ = 0x3f800000;
    auVar1364._0_8_ = 0x3f8000003f800000;
    auVar1364._12_4_ = 0x3f800000;
    auVar1420._8_4_ = 0x3d9021bb;
    auVar1420._0_8_ = 0x3d9021bb3d9021bb;
    auVar1420._12_4_ = 0x3d9021bb;
    auVar1474._8_4_ = 0xbdebd1b8;
    auVar1474._0_8_ = 0xbdebd1b8bdebd1b8;
    auVar1474._12_4_ = 0xbdebd1b8;
    auVar1528._8_4_ = 0x3def251a;
    auVar1528._0_8_ = 0x3def251a3def251a;
    auVar1528._12_4_ = 0x3def251a;
    auVar1582._8_4_ = 0xbdfe5d4f;
    auVar1582._0_8_ = 0xbdfe5d4fbdfe5d4f;
    auVar1582._12_4_ = 0xbdfe5d4f;
    auVar1636._8_4_ = 0x3e11e9bf;
    auVar1636._0_8_ = 0x3e11e9bf3e11e9bf;
    auVar1636._12_4_ = 0x3e11e9bf;
    auVar1690._8_4_ = 0xbe2aae50;
    auVar1690._0_8_ = 0xbe2aae50be2aae50;
    auVar1690._12_4_ = 0xbe2aae50;
    auVar1744._8_4_ = 0x3e4cceac;
    auVar1744._0_8_ = 0x3e4cceac3e4cceac;
    auVar1744._12_4_ = 0x3e4cceac;
    auVar1794._8_4_ = 0xbe7ffffc;
    auVar1794._0_8_ = 0xbe7ffffcbe7ffffc;
    auVar1794._12_4_ = 0xbe7ffffc;
    auVar461 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
    auVar519 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
    auVar472 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar464 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
    auVar460 = vxorps_avx512vl(auVar460,auVar460);
    auVar442 = vpcmpeqd_avx(auVar442,auVar442);
    auVar465 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
    auVar466 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
    auVar469 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
    auVar470 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
    auVar523 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
    auVar443 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
    auVar444 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
    auVar445 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
    auVar446 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
    do {
      auVar439 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[lVar428]));
      auVar111._8_4_ = 0x800000;
      auVar111._0_8_ = 0x80000000800000;
      auVar111._12_4_ = 0x800000;
      auVar447 = vmaxps_avx512vl(auVar439,auVar111);
      auVar440 = vpsrld_avx512vl(auVar447,0x17);
      auVar1131._8_4_ = 0x807fffff;
      auVar1131._0_8_ = 0x807fffff807fffff;
      auVar1131._12_4_ = 0x807fffff;
      auVar112._8_4_ = 0x3f000000;
      auVar112._0_8_ = 0x3f0000003f000000;
      auVar112._12_4_ = 0x3f000000;
      auVar447 = vpternlogd_avx512vl(auVar447,auVar1131,auVar112,0xea);
      auVar113._8_4_ = 0x3f3504f3;
      auVar113._0_8_ = 0x3f3504f33f3504f3;
      auVar113._12_4_ = 0x3f3504f3;
      uVar47 = vcmpps_avx512vl(auVar447,auVar113,1);
      auVar434 = vaddps_avx512vl(auVar447,auVar1305);
      auVar447 = vaddps_avx512vl(auVar434,auVar447);
      bVar12 = (bool)((byte)uVar47 & 1);
      auVar543._0_4_ = (float)((uint)bVar12 * auVar447._0_4_ | (uint)!bVar12 * auVar434._0_4_);
      bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
      auVar543._4_4_ = (float)((uint)bVar12 * auVar447._4_4_ | (uint)!bVar12 * auVar434._4_4_);
      bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
      auVar543._8_4_ = (float)((uint)bVar12 * auVar447._8_4_ | (uint)!bVar12 * auVar434._8_4_);
      bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar543._12_4_ = (float)((uint)bVar12 * auVar447._12_4_ | (uint)!bVar12 * auVar434._12_4_);
      auVar447 = vfmadd213ps_avx512vl(auVar1420,auVar543,auVar1474);
      auVar447 = vfmadd213ps_avx512vl(auVar447,auVar543,auVar1528);
      auVar447 = vfmadd213ps_avx512vl(auVar447,auVar543,auVar1582);
      auVar447 = vfmadd213ps_avx512vl(auVar447,auVar543,auVar1636);
      auVar447 = vfmadd213ps_avx512vl(auVar447,auVar543,auVar1690);
      auVar447 = vfmadd213ps_avx512vl(auVar447,auVar543,auVar1744);
      auVar1186._0_4_ = auVar543._0_4_ * auVar543._0_4_;
      auVar1186._4_4_ = auVar543._4_4_ * auVar543._4_4_;
      auVar1186._8_4_ = auVar543._8_4_ * auVar543._8_4_;
      auVar1186._12_4_ = auVar543._12_4_ * auVar543._12_4_;
      auVar447 = vfmadd213ps_avx512vl(auVar447,auVar543,auVar1794);
      auVar447 = vfmadd213ps_avx512vl(auVar447,auVar543,auVar461);
      auVar1240._0_4_ = auVar1186._0_4_ * auVar543._0_4_;
      auVar1240._4_4_ = auVar1186._4_4_ * auVar543._4_4_;
      auVar1240._8_4_ = auVar1186._8_4_ * auVar543._8_4_;
      auVar1240._12_4_ = auVar1186._12_4_ * auVar543._12_4_;
      auVar434 = vmulps_avx512vl(auVar1240,auVar447);
      auVar114._8_4_ = 0xffffff82;
      auVar114._0_8_ = 0xffffff82ffffff82;
      auVar114._12_4_ = 0xffffff82;
      auVar447 = vpaddd_avx512vl(auVar440,auVar114);
      auVar447 = vcvtdq2ps_avx(auVar447);
      auVar440 = vsubps_avx512vl(auVar447,auVar1364);
      bVar12 = (bool)((byte)uVar47 & 1);
      auVar544._0_4_ = (uint)bVar12 * auVar440._0_4_ | (uint)!bVar12 * auVar447._0_4_;
      bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
      auVar544._4_4_ = (uint)bVar12 * auVar440._4_4_ | (uint)!bVar12 * auVar447._4_4_;
      bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
      auVar544._8_4_ = (uint)bVar12 * auVar440._8_4_ | (uint)!bVar12 * auVar447._8_4_;
      bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar544._12_4_ = (uint)bVar12 * auVar440._12_4_ | (uint)!bVar12 * auVar447._12_4_;
      auVar447 = vfmadd231ps_avx512vl(auVar434,auVar544,auVar519);
      auVar447 = vfmsub231ps_avx512vl(auVar447,auVar472,auVar1186);
      auVar447 = vsubps_avx(auVar447,auVar543);
      auVar447 = vfmsub231ps_avx512vl(auVar447,auVar464,auVar544);
      uVar47 = vcmpps_avx512vl(auVar439,auVar460,2);
      bVar12 = (bool)((byte)uVar47 & 1);
      bVar13 = (bool)((byte)(uVar47 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar47 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar1052._0_4_ =
           (float)((uint)bVar12 * auVar442._0_4_ | (uint)!bVar12 * auVar447._0_4_) * fVar890;
      auVar1052._4_4_ =
           (float)((uint)bVar13 * auVar442._4_4_ | (uint)!bVar13 * auVar447._4_4_) * fVar891;
      auVar1052._8_4_ =
           (float)((uint)bVar14 * auVar442._8_4_ | (uint)!bVar14 * auVar447._8_4_) * fVar397;
      auVar1052._12_4_ =
           (float)((uint)bVar15 * auVar442._12_4_ | (uint)!bVar15 * auVar447._12_4_) *
           auVar734._12_4_;
      auVar447 = vminps_avx512vl(auVar1052,auVar465);
      auVar439 = vmaxps_avx512vl(auVar447,auVar466);
      auVar440 = vfmadd231ps_avx512vl(auVar472,auVar439,auVar469);
      auVar1187._0_4_ = (int)auVar440._0_4_;
      auVar1187._4_4_ = (int)auVar440._4_4_;
      auVar1187._8_4_ = (int)auVar440._8_4_;
      auVar1187._12_4_ = (int)auVar440._12_4_;
      auVar447 = vcvtdq2ps_avx(auVar1187);
      uVar47 = vcmpps_avx512vl(auVar440,auVar447,1);
      auVar440 = vsubps_avx512vl(auVar447,auVar1364);
      bVar12 = (bool)((byte)uVar47 & 1);
      auVar545._0_4_ = (float)((uint)bVar12 * auVar440._0_4_ | (uint)!bVar12 * auVar447._0_4_);
      bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
      auVar545._4_4_ = (float)((uint)bVar12 * auVar440._4_4_ | (uint)!bVar12 * auVar447._4_4_);
      bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
      auVar545._8_4_ = (float)((uint)bVar12 * auVar440._8_4_ | (uint)!bVar12 * auVar447._8_4_);
      bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar545._12_4_ = (float)((uint)bVar12 * auVar440._12_4_ | (uint)!bVar12 * auVar447._12_4_);
      auVar447 = vfmsub231ps_avx512vl(auVar439,auVar545,auVar464);
      auVar447 = vfnmsub231ps_avx512vl(auVar447,auVar545,auVar519);
      auVar439 = vfmadd213ps_avx512vl(auVar470,auVar447,auVar523);
      auVar439 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar443);
      auVar1241._0_4_ = auVar447._0_4_ * auVar447._0_4_;
      auVar1241._4_4_ = auVar447._4_4_ * auVar447._4_4_;
      auVar1241._8_4_ = auVar447._8_4_ * auVar447._8_4_;
      auVar1241._12_4_ = auVar447._12_4_ * auVar447._12_4_;
      auVar439 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar444);
      auVar439 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar445);
      auVar439 = vfmadd213ps_avx512vl(auVar439,auVar447,auVar472);
      auVar447 = vfmadd213ps_fma(auVar439,auVar1241,auVar447);
      auVar1053._0_4_ = (int)auVar545._0_4_;
      auVar1053._4_4_ = (int)auVar545._4_4_;
      auVar1053._8_4_ = (int)auVar545._8_4_;
      auVar1053._12_4_ = (int)auVar545._12_4_;
      auVar439 = vpslld_avx(auVar1053,0x17);
      auVar439 = vpaddd_avx512vl(auVar439,auVar446);
      auVar447 = vfmadd213ps_fma(auVar439,auVar447,auVar439);
      *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar447;
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      lVar428 = lVar428 + 1;
    } while (uVar425 - uVar427 != (int)lVar428);
    return;
  case 10:
    uVar425 = bw;
    if (bw < aw) {
      uVar425 = aw;
    }
    iVar424 = bp;
    if (bp < ap) {
      iVar424 = ap;
    }
    uVar427 = iVar424 * uVar425;
    if (ap == bp) {
      if (aw == bw) {
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          auVar1774 = ZEXT864(0);
          auVar716 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar718 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar725 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar726 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar727 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar728 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          auVar729 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar730 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar734 = in_ZMM20;
          do {
            auVar737 = *(undefined1 (*) [64])ptr;
            auVar852 = *(undefined1 (*) [64])ptr1;
            auVar733 = vdivps_avx512f(auVar737,auVar852);
            uVar47 = vcmpps_avx512f(auVar737,auVar1774,1);
            auVar736 = vandps_avx512dq(auVar733,auVar718);
            auVar338._8_4_ = 0xc0490fdb;
            auVar338._0_8_ = 0xc0490fdbc0490fdb;
            auVar338._12_4_ = 0xc0490fdb;
            auVar338._16_4_ = 0xc0490fdb;
            auVar338._20_4_ = 0xc0490fdb;
            auVar338._24_4_ = 0xc0490fdb;
            auVar338._28_4_ = 0xc0490fdb;
            auVar338._32_4_ = 0xc0490fdb;
            auVar338._36_4_ = 0xc0490fdb;
            auVar338._40_4_ = 0xc0490fdb;
            auVar338._44_4_ = 0xc0490fdb;
            auVar338._48_4_ = 0xc0490fdb;
            auVar338._52_4_ = 0xc0490fdb;
            auVar338._56_4_ = 0xc0490fdb;
            auVar338._60_4_ = 0xc0490fdb;
            auVar731 = vblendmps_avx512f(auVar717,auVar338);
            bVar12 = (bool)((byte)uVar47 & 1);
            in_ZMM20._0_4_ = (uint)bVar12 * auVar731._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            in_ZMM20._4_4_ = (uint)bVar12 * auVar731._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            in_ZMM20._8_4_ = (uint)bVar12 * auVar731._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            in_ZMM20._12_4_ = (uint)bVar12 * auVar731._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            in_ZMM20._16_4_ = (uint)bVar12 * auVar731._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            in_ZMM20._20_4_ = (uint)bVar12 * auVar731._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            in_ZMM20._24_4_ = (uint)bVar12 * auVar731._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            in_ZMM20._28_4_ = (uint)bVar12 * auVar731._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            in_ZMM20._32_4_ = (uint)bVar12 * auVar731._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            in_ZMM20._36_4_ = (uint)bVar12 * auVar731._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            in_ZMM20._40_4_ = (uint)bVar12 * auVar731._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            in_ZMM20._44_4_ = (uint)bVar12 * auVar731._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            in_ZMM20._48_4_ = (uint)bVar12 * auVar731._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            in_ZMM20._52_4_ = (uint)bVar12 * auVar731._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            in_ZMM20._56_4_ = (uint)bVar12 * auVar731._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            in_ZMM20._60_4_ = (uint)bVar12 * auVar731._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            uVar47 = vcmpps_avx512f(auVar719,auVar736,1);
            auVar339._8_4_ = 0xbf800000;
            auVar339._0_8_ = 0xbf800000bf800000;
            auVar339._12_4_ = 0xbf800000;
            auVar339._16_4_ = 0xbf800000;
            auVar339._20_4_ = 0xbf800000;
            auVar339._24_4_ = 0xbf800000;
            auVar339._28_4_ = 0xbf800000;
            auVar339._32_4_ = 0xbf800000;
            auVar339._36_4_ = 0xbf800000;
            auVar339._40_4_ = 0xbf800000;
            auVar339._44_4_ = 0xbf800000;
            auVar339._48_4_ = 0xbf800000;
            auVar339._52_4_ = 0xbf800000;
            auVar339._56_4_ = 0xbf800000;
            auVar339._60_4_ = 0xbf800000;
            auVar734 = vblendmps_avx512f(auVar736,auVar339);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar746._0_4_ = (uint)bVar12 * auVar734._0_4_ | (uint)!bVar12 * in_ZMM21._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar746._4_4_ = (uint)bVar12 * auVar734._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar746._8_4_ = (uint)bVar12 * auVar734._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar746._12_4_ = (uint)bVar12 * auVar734._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar746._16_4_ = (uint)bVar12 * auVar734._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar746._20_4_ = (uint)bVar12 * auVar734._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar746._24_4_ = (uint)bVar12 * auVar734._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar746._28_4_ = (uint)bVar12 * auVar734._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
            bVar29 = (byte)(uVar47 >> 8);
            bVar12 = (bool)(bVar29 & 1);
            auVar746._32_4_ = (uint)bVar12 * auVar734._32_4_ | (uint)!bVar12 * in_ZMM21._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar746._36_4_ = (uint)bVar12 * auVar734._36_4_ | (uint)!bVar12 * in_ZMM21._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar746._40_4_ = (uint)bVar12 * auVar734._40_4_ | (uint)!bVar12 * in_ZMM21._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar746._44_4_ = (uint)bVar12 * auVar734._44_4_ | (uint)!bVar12 * in_ZMM21._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar746._48_4_ = (uint)bVar12 * auVar734._48_4_ | (uint)!bVar12 * in_ZMM21._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar746._52_4_ = (uint)bVar12 * auVar734._52_4_ | (uint)!bVar12 * in_ZMM21._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar746._56_4_ = (uint)bVar12 * auVar734._56_4_ | (uint)!bVar12 * in_ZMM21._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar746._60_4_ = (uint)bVar12 * auVar734._60_4_ | (uint)!bVar12 * in_ZMM21._60_4_;
            auVar734 = vmaxps_avx512f(auVar736,auVar719);
            auVar734 = vdivps_avx512f(auVar746,auVar734);
            uVar430 = vcmpps_avx512f(auVar852,auVar1774,4);
            in_ZMM21 = vmulps_avx512f(auVar734,auVar734);
            uVar429 = vcmpps_avx512f(auVar737,auVar1774,4);
            auVar736 = vmulps_avx512f(in_ZMM21,in_ZMM21);
            auVar731 = vfmadd213ps_avx512f(auVar720,auVar736,auVar721);
            auVar731 = vfmadd213ps_avx512f(auVar731,auVar736,auVar722);
            auVar732 = vfmadd213ps_avx512f(auVar724,auVar736,auVar725);
            auVar732 = vfmadd213ps_avx512f(auVar732,auVar736,auVar726);
            auVar731 = vfmadd213ps_avx512f(auVar731,auVar736,auVar723);
            auVar732 = vfmadd213ps_avx512f(auVar732,auVar736,auVar727);
            auVar736 = vfmadd213ps_avx512f(auVar732,auVar736,auVar719);
            auVar736 = vfmadd231ps_avx512f(auVar736,in_ZMM21,auVar731);
            uVar431 = vcmpps_avx512f(auVar852,auVar1774,1);
            auVar734 = vmulps_avx512f(auVar736,auVar734);
            auVar736 = vaddps_avx512f(auVar734,auVar728);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar747._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar747._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar747._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar747._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar747._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar747._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar747._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar747._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)(bVar29 & 1);
            auVar747._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar747._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar747._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar747._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar747._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar747._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar747._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar747._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            auVar734 = vpternlogd_avx512f(auVar747,auVar733,auVar716,0xf8);
            auVar733 = vaddps_avx512f(auVar734,in_ZMM20);
            bVar12 = (bool)((byte)uVar431 & 1);
            bVar15 = (bool)((byte)(uVar431 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar431 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar431 >> 3) & 1);
            bVar21 = (bool)((byte)(uVar431 >> 4) & 1);
            bVar23 = (bool)((byte)(uVar431 >> 5) & 1);
            bVar25 = (bool)((byte)(uVar431 >> 6) & 1);
            bVar27 = (bool)((byte)(uVar431 >> 7) & 1);
            bVar30 = (bool)((byte)(uVar431 >> 8) & 1);
            bVar32 = (bool)((byte)(uVar431 >> 9) & 1);
            bVar34 = (bool)((byte)(uVar431 >> 10) & 1);
            bVar36 = (bool)((byte)(uVar431 >> 0xb) & 1);
            bVar38 = (bool)((byte)(uVar431 >> 0xc) & 1);
            bVar40 = (bool)((byte)(uVar431 >> 0xd) & 1);
            bVar42 = (bool)((byte)(uVar431 >> 0xe) & 1);
            bVar44 = SUB81(uVar431 >> 0xf,0);
            auVar852 = vpternlogd_avx512f(auVar852,auVar716,auVar729,0xea);
            uVar47 = vcmpps_avx512f(auVar852,auVar1774,1);
            auVar737 = vpternlogd_avx512f(auVar737,auVar716,auVar730,0xea);
            bVar13 = (bool)((byte)uVar430 & 1);
            bVar16 = (bool)((byte)(uVar430 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar430 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar430 >> 3) & 1);
            bVar22 = (bool)((byte)(uVar430 >> 4) & 1);
            bVar24 = (bool)((byte)(uVar430 >> 5) & 1);
            bVar26 = (bool)((byte)(uVar430 >> 6) & 1);
            bVar28 = (bool)((byte)(uVar430 >> 7) & 1);
            bVar31 = (bool)((byte)(uVar430 >> 8) & 1);
            bVar33 = (bool)((byte)(uVar430 >> 9) & 1);
            bVar35 = (bool)((byte)(uVar430 >> 10) & 1);
            bVar37 = (bool)((byte)(uVar430 >> 0xb) & 1);
            bVar39 = (bool)((byte)(uVar430 >> 0xc) & 1);
            bVar41 = (bool)((byte)(uVar430 >> 0xd) & 1);
            bVar43 = (bool)((byte)(uVar430 >> 0xe) & 1);
            bVar45 = SUB81(uVar430 >> 0xf,0);
            bVar14 = (bool)((byte)uVar429 & 1);
            auVar748._0_4_ =
                 (uint)bVar14 *
                 ((uint)bVar13 * ((uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar734._0_4_) |
                 (uint)!bVar13 * auVar737._0_4_) |
                 (uint)!bVar14 * (uint)((byte)uVar47 & 1) * auVar717._0_4_;
            bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
            auVar748._4_4_ =
                 (uint)bVar12 *
                 ((uint)bVar16 * ((uint)bVar15 * auVar733._4_4_ | (uint)!bVar15 * auVar734._4_4_) |
                 (uint)!bVar16 * auVar737._4_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 1) & 1) * auVar717._4_4_;
            bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
            auVar748._8_4_ =
                 (uint)bVar12 *
                 ((uint)bVar18 * ((uint)bVar17 * auVar733._8_4_ | (uint)!bVar17 * auVar734._8_4_) |
                 (uint)!bVar18 * auVar737._8_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 2) & 1) * auVar717._8_4_;
            bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
            auVar748._12_4_ =
                 (uint)bVar12 *
                 ((uint)bVar20 * ((uint)bVar19 * auVar733._12_4_ | (uint)!bVar19 * auVar734._12_4_)
                 | (uint)!bVar20 * auVar737._12_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 3) & 1) * auVar717._12_4_;
            bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
            auVar748._16_4_ =
                 (uint)bVar12 *
                 ((uint)bVar22 * ((uint)bVar21 * auVar733._16_4_ | (uint)!bVar21 * auVar734._16_4_)
                 | (uint)!bVar22 * auVar737._16_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 4) & 1) * auVar717._16_4_;
            bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
            auVar748._20_4_ =
                 (uint)bVar12 *
                 ((uint)bVar24 * ((uint)bVar23 * auVar733._20_4_ | (uint)!bVar23 * auVar734._20_4_)
                 | (uint)!bVar24 * auVar737._20_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 5) & 1) * auVar717._20_4_;
            bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
            auVar748._24_4_ =
                 (uint)bVar12 *
                 ((uint)bVar26 * ((uint)bVar25 * auVar733._24_4_ | (uint)!bVar25 * auVar734._24_4_)
                 | (uint)!bVar26 * auVar737._24_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 6) & 1) * auVar717._24_4_;
            bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
            auVar748._28_4_ =
                 (uint)bVar12 *
                 ((uint)bVar28 * ((uint)bVar27 * auVar733._28_4_ | (uint)!bVar27 * auVar734._28_4_)
                 | (uint)!bVar28 * auVar737._28_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 7) & 1) * auVar717._28_4_;
            bVar12 = (bool)((byte)(uVar429 >> 8) & 1);
            auVar748._32_4_ =
                 (uint)bVar12 *
                 ((uint)bVar31 * ((uint)bVar30 * auVar733._32_4_ | (uint)!bVar30 * auVar734._32_4_)
                 | (uint)!bVar31 * auVar737._32_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 8) & 1) * auVar717._32_4_;
            bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
            auVar748._36_4_ =
                 (uint)bVar12 *
                 ((uint)bVar33 * ((uint)bVar32 * auVar733._36_4_ | (uint)!bVar32 * auVar734._36_4_)
                 | (uint)!bVar33 * auVar737._36_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 9) & 1) * auVar717._36_4_;
            bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
            auVar748._40_4_ =
                 (uint)bVar12 *
                 ((uint)bVar35 * ((uint)bVar34 * auVar733._40_4_ | (uint)!bVar34 * auVar734._40_4_)
                 | (uint)!bVar35 * auVar737._40_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 10) & 1) * auVar717._40_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
            auVar748._44_4_ =
                 (uint)bVar12 *
                 ((uint)bVar37 * ((uint)bVar36 * auVar733._44_4_ | (uint)!bVar36 * auVar734._44_4_)
                 | (uint)!bVar37 * auVar737._44_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xb) & 1) * auVar717._44_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
            auVar748._48_4_ =
                 (uint)bVar12 *
                 ((uint)bVar39 * ((uint)bVar38 * auVar733._48_4_ | (uint)!bVar38 * auVar734._48_4_)
                 | (uint)!bVar39 * auVar737._48_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xc) & 1) * auVar717._48_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
            auVar748._52_4_ =
                 (uint)bVar12 *
                 ((uint)bVar41 * ((uint)bVar40 * auVar733._52_4_ | (uint)!bVar40 * auVar734._52_4_)
                 | (uint)!bVar41 * auVar737._52_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xd) & 1) * auVar717._52_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
            auVar748._56_4_ =
                 (uint)bVar12 *
                 ((uint)bVar43 * ((uint)bVar42 * auVar733._56_4_ | (uint)!bVar42 * auVar734._56_4_)
                 | (uint)!bVar43 * auVar737._56_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xe) & 1) * auVar717._56_4_;
            bVar12 = SUB81(uVar429 >> 0xf,0);
            auVar748._60_4_ =
                 (uint)bVar12 *
                 ((uint)bVar45 * ((uint)bVar44 * auVar733._60_4_ | (uint)!bVar44 * auVar734._60_4_)
                 | (uint)!bVar45 * auVar737._60_4_) |
                 (uint)!bVar12 * (uint)(byte)(uVar47 >> 0xf) * auVar717._60_4_;
            ptr = (float *)((long)ptr + 0x40);
            *(undefined1 (*) [64])outptr = auVar748;
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
            auVar734 = in_ZMM20;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        if ((int)(uVar425 | 7) < (int)uVar427) {
          auVar910._8_4_ = 0x80000000;
          auVar910._0_8_ = 0x8000000080000000;
          auVar910._12_4_ = 0x80000000;
          auVar910._16_4_ = 0x80000000;
          auVar910._20_4_ = 0x80000000;
          auVar910._24_4_ = 0x80000000;
          auVar910._28_4_ = 0x80000000;
          auVar983._8_4_ = 0x40490fdb;
          auVar983._0_8_ = 0x40490fdb40490fdb;
          auVar983._12_4_ = 0x40490fdb;
          auVar983._16_4_ = 0x40490fdb;
          auVar983._20_4_ = 0x40490fdb;
          auVar983._24_4_ = 0x40490fdb;
          auVar983._28_4_ = 0x40490fdb;
          auVar1056._8_4_ = 0x7fffffff;
          auVar1056._0_8_ = 0x7fffffff7fffffff;
          auVar1056._12_4_ = 0x7fffffff;
          auVar1056._16_4_ = 0x7fffffff;
          auVar1056._20_4_ = 0x7fffffff;
          auVar1056._24_4_ = 0x7fffffff;
          auVar1056._28_4_ = 0x7fffffff;
          auVar1133._8_4_ = 0x3f800000;
          auVar1133._0_8_ = 0x3f8000003f800000;
          auVar1133._12_4_ = 0x3f800000;
          auVar1133._16_4_ = 0x3f800000;
          auVar1133._20_4_ = 0x3f800000;
          auVar1133._24_4_ = 0x3f800000;
          auVar1133._28_4_ = 0x3f800000;
          auVar1193._8_4_ = 0xbc83a25c;
          auVar1193._0_8_ = 0xbc83a25cbc83a25c;
          auVar1193._12_4_ = 0xbc83a25c;
          auVar1193._16_4_ = 0xbc83a25c;
          auVar1193._20_4_ = 0xbc83a25c;
          auVar1193._24_4_ = 0xbc83a25c;
          auVar1193._28_4_ = 0xbc83a25c;
          auVar1248._8_4_ = 0xbd99b01e;
          auVar1248._0_8_ = 0xbd99b01ebd99b01e;
          auVar1248._12_4_ = 0xbd99b01e;
          auVar1248._16_4_ = 0xbd99b01e;
          auVar1248._20_4_ = 0xbd99b01e;
          auVar1248._24_4_ = 0xbd99b01e;
          auVar1248._28_4_ = 0xbd99b01e;
          auVar1310._8_4_ = 0xbe117200;
          auVar1310._0_8_ = 0xbe117200be117200;
          auVar1310._12_4_ = 0xbe117200;
          auVar1310._16_4_ = 0xbe117200;
          auVar1310._20_4_ = 0xbe117200;
          auVar1310._24_4_ = 0xbe117200;
          auVar1310._28_4_ = 0xbe117200;
          auVar1369._8_4_ = 0xbeaaaa53;
          auVar1369._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1369._12_4_ = 0xbeaaaa53;
          auVar1369._16_4_ = 0xbeaaaa53;
          auVar1369._20_4_ = 0xbeaaaa53;
          auVar1369._24_4_ = 0xbeaaaa53;
          auVar1369._28_4_ = 0xbeaaaa53;
          auVar1425._8_4_ = 0x3b3ac537;
          auVar1425._0_8_ = 0x3b3ac5373b3ac537;
          auVar1425._12_4_ = 0x3b3ac537;
          auVar1425._16_4_ = 0x3b3ac537;
          auVar1425._20_4_ = 0x3b3ac537;
          auVar1425._24_4_ = 0x3b3ac537;
          auVar1425._28_4_ = 0x3b3ac537;
          auVar1479._8_4_ = 0x3d2edd4e;
          auVar1479._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1479._12_4_ = 0x3d2edd4e;
          auVar1479._16_4_ = 0x3d2edd4e;
          auVar1479._20_4_ = 0x3d2edd4e;
          auVar1479._24_4_ = 0x3d2edd4e;
          auVar1479._28_4_ = 0x3d2edd4e;
          auVar1533._8_4_ = 0x3dd9ed24;
          auVar1533._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1533._12_4_ = 0x3dd9ed24;
          auVar1533._16_4_ = 0x3dd9ed24;
          auVar1533._20_4_ = 0x3dd9ed24;
          auVar1533._24_4_ = 0x3dd9ed24;
          auVar1533._28_4_ = 0x3dd9ed24;
          auVar1587._8_4_ = 0x3e4cb974;
          auVar1587._0_8_ = 0x3e4cb9743e4cb974;
          auVar1587._12_4_ = 0x3e4cb974;
          auVar1587._16_4_ = 0x3e4cb974;
          auVar1587._20_4_ = 0x3e4cb974;
          auVar1587._24_4_ = 0x3e4cb974;
          auVar1587._28_4_ = 0x3e4cb974;
          auVar1641._8_4_ = 0x3fc90fdb;
          auVar1641._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1641._12_4_ = 0x3fc90fdb;
          auVar1641._16_4_ = 0x3fc90fdb;
          auVar1641._20_4_ = 0x3fc90fdb;
          auVar1641._24_4_ = 0x3fc90fdb;
          auVar1641._28_4_ = 0x3fc90fdb;
          auVar1695._8_4_ = 0x40490fdb;
          auVar1695._0_8_ = 0x40490fdb40490fdb;
          auVar1695._12_4_ = 0x40490fdb;
          auVar1695._16_4_ = 0x40490fdb;
          auVar1695._20_4_ = 0x40490fdb;
          auVar1695._24_4_ = 0x40490fdb;
          auVar1695._28_4_ = 0x40490fdb;
          auVar1798._8_4_ = 0x3fc90fdb;
          auVar1798._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1798._12_4_ = 0x3fc90fdb;
          auVar1798._16_4_ = 0x3fc90fdb;
          auVar1798._20_4_ = 0x3fc90fdb;
          auVar1798._24_4_ = 0x3fc90fdb;
          auVar1798._28_4_ = 0x3fc90fdb;
          uVar882 = uVar425;
          do {
            auVar674 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
            auVar677 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr1;
            auVar678 = vdivps_avx512vl(auVar674,auVar677);
            auVar684 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            uVar47 = vcmpps_avx512vl(auVar674,auVar684,1);
            vandps_avx512vl(auVar678,auVar1056);
            auVar183._8_4_ = 0xc0490fdb;
            auVar183._0_8_ = 0xc0490fdbc0490fdb;
            auVar183._12_4_ = 0xc0490fdb;
            auVar183._16_4_ = 0xc0490fdb;
            auVar183._20_4_ = 0xc0490fdb;
            auVar183._24_4_ = 0xc0490fdb;
            auVar183._28_4_ = 0xc0490fdb;
            auVar562 = vblendmps_avx512vl(auVar983,auVar183);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar577._0_4_ = (uint)bVar12 * auVar562._0_4_ | (uint)!bVar12 * in_ZMM20._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar577._4_4_ = (uint)bVar12 * auVar562._4_4_ | (uint)!bVar12 * in_ZMM20._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar577._8_4_ = (uint)bVar12 * auVar562._8_4_ | (uint)!bVar12 * in_ZMM20._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar577._12_4_ = (uint)bVar12 * auVar562._12_4_ | (uint)!bVar12 * in_ZMM20._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar577._16_4_ = (uint)bVar12 * auVar562._16_4_ | (uint)!bVar12 * in_ZMM20._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar577._20_4_ = (uint)bVar12 * auVar562._20_4_ | (uint)!bVar12 * in_ZMM20._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar577._24_4_ = (uint)bVar12 * auVar562._24_4_ | (uint)!bVar12 * in_ZMM20._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar577._28_4_ = (uint)bVar12 * auVar562._28_4_ | (uint)!bVar12 * in_ZMM20._28_4_;
            in_ZMM20 = ZEXT3264(auVar577);
            uVar47 = vcmpps_avx512vl(auVar1133,auVar678,1);
            auVar184._8_4_ = 0xbf800000;
            auVar184._0_8_ = 0xbf800000bf800000;
            auVar184._12_4_ = 0xbf800000;
            auVar184._16_4_ = 0xbf800000;
            auVar184._20_4_ = 0xbf800000;
            auVar184._24_4_ = 0xbf800000;
            auVar184._28_4_ = 0xbf800000;
            auVar562 = vblendmps_avx512vl(auVar678,auVar184);
            bVar29 = (byte)uVar47;
            auVar578._0_4_ =
                 (uint)(bVar29 & 1) * auVar562._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM21._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar578._4_4_ = (uint)bVar12 * auVar562._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar578._8_4_ = (uint)bVar12 * auVar562._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar578._12_4_ = (uint)bVar12 * auVar562._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar578._16_4_ = (uint)bVar12 * auVar562._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar578._20_4_ = (uint)bVar12 * auVar562._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar578._24_4_ = (uint)bVar12 * auVar562._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar578._28_4_ = (uint)bVar12 * auVar562._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
            auVar562 = vdivps_avx512vl(auVar578,auVar678);
            auVar579._0_4_ =
                 (uint)(bVar29 & 1) * auVar562._0_4_ | !(bool)(bVar29 & 1) * auVar578._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar579._4_4_ = (uint)bVar12 * auVar562._4_4_ | !bVar12 * auVar578._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar579._8_4_ = (uint)bVar12 * auVar562._8_4_ | !bVar12 * auVar578._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar579._12_4_ = (uint)bVar12 * auVar562._12_4_ | !bVar12 * auVar578._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar579._16_4_ = (uint)bVar12 * auVar562._16_4_ | !bVar12 * auVar578._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar579._20_4_ = (uint)bVar12 * auVar562._20_4_ | !bVar12 * auVar578._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar579._24_4_ = (uint)bVar12 * auVar562._24_4_ | !bVar12 * auVar578._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar579._28_4_ = (uint)bVar12 * auVar562._28_4_ | !bVar12 * auVar578._28_4_;
            in_ZMM21 = ZEXT3264(auVar579);
            uVar430 = vcmpps_avx512vl(auVar674,auVar684,4);
            auVar562 = vmulps_avx512vl(auVar579,auVar579);
            uVar429 = vcmpps_avx512vl(auVar677,auVar684,1);
            auVar679 = vmulps_avx512vl(auVar562,auVar562);
            auVar680 = vfmadd213ps_avx512vl(auVar1193,auVar679,auVar1248);
            auVar680 = vfmadd213ps_avx512vl(auVar680,auVar679,auVar1310);
            auVar683 = vfmadd213ps_avx512vl(auVar1425,auVar679,auVar1479);
            auVar683 = vfmadd213ps_avx512vl(auVar683,auVar679,auVar1533);
            auVar680 = vfmadd213ps_avx512vl(auVar680,auVar679,auVar1369);
            auVar683 = vfmadd213ps_avx512vl(auVar683,auVar679,auVar1587);
            auVar679 = vfmadd213ps_avx512vl(auVar683,auVar679,auVar1133);
            auVar562 = vfmadd231ps_avx512vl(auVar679,auVar562,auVar680);
            uVar431 = vcmpps_avx512vl(auVar677,auVar684,4);
            uVar431 = uVar430 & uVar431;
            auVar562 = vmulps_avx512vl(auVar562,auVar579);
            auVar679 = vaddps_avx512vl(auVar562,auVar1641);
            auVar580._0_4_ =
                 (uint)(bVar29 & 1) * auVar679._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar562._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar580._4_4_ = (uint)bVar12 * auVar679._4_4_ | (uint)!bVar12 * auVar562._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar580._8_4_ = (uint)bVar12 * auVar679._8_4_ | (uint)!bVar12 * auVar562._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar580._12_4_ = (uint)bVar12 * auVar679._12_4_ | (uint)!bVar12 * auVar562._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar580._16_4_ = (uint)bVar12 * auVar679._16_4_ | (uint)!bVar12 * auVar562._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar580._20_4_ = (uint)bVar12 * auVar679._20_4_ | (uint)!bVar12 * auVar562._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar580._24_4_ = (uint)bVar12 * auVar679._24_4_ | (uint)!bVar12 * auVar562._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar580._28_4_ = (uint)bVar12 * auVar679._28_4_ | (uint)!bVar12 * auVar562._28_4_;
            auVar677 = vpternlogd_avx512vl(auVar677,auVar1695,auVar910,0xec);
            auVar678 = vpternlogd_avx512vl(auVar580,auVar678,auVar910,0xf8);
            uVar46 = vcmpps_avx512vl(auVar684,auVar677,2);
            bVar29 = ~((byte)uVar430 | (byte)uVar46);
            auVar677 = vaddps_avx512vl(auVar678,auVar577);
            bVar12 = (bool)((byte)uVar429 & 1);
            bVar15 = (bool)((byte)(uVar429 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar429 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar429 >> 3) & 1);
            bVar21 = (bool)((byte)(uVar429 >> 4) & 1);
            bVar23 = (bool)((byte)(uVar429 >> 5) & 1);
            bVar25 = (bool)((byte)(uVar429 >> 6) & 1);
            bVar27 = SUB81(uVar429 >> 7,0);
            auVar562 = vmovdqa32_avx512vl(auVar1695);
            iVar424 = (uint)(bVar29 & 1) * auVar562._0_4_;
            iVar426 = (uint)(bVar29 >> 1 & 1) * auVar562._4_4_;
            auVar581._4_4_ = iVar426;
            auVar581._0_4_ = iVar424;
            iVar1 = (uint)(bVar29 >> 2 & 1) * auVar562._8_4_;
            auVar581._8_4_ = iVar1;
            iVar2 = (uint)(bVar29 >> 3 & 1) * auVar562._12_4_;
            auVar581._12_4_ = iVar2;
            iVar3 = (uint)(bVar29 >> 4 & 1) * auVar562._16_4_;
            auVar581._16_4_ = iVar3;
            iVar6 = (uint)(bVar29 >> 5 & 1) * auVar562._20_4_;
            auVar581._20_4_ = iVar6;
            iVar5 = (uint)(bVar29 >> 6 & 1) * auVar562._24_4_;
            auVar581._24_4_ = iVar5;
            iVar4 = (uint)(bVar29 >> 7) * auVar562._28_4_;
            auVar581._28_4_ = iVar4;
            auVar674 = vpternlogd_avx512vl(auVar674,auVar581,auVar910,0xec);
            auVar674 = vpord_avx512vl(auVar674,auVar1798);
            bVar13 = (bool)((byte)uVar430 & 1);
            bVar16 = (bool)((byte)(uVar430 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar430 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar430 >> 3) & 1);
            bVar22 = (bool)((byte)(uVar430 >> 4) & 1);
            bVar24 = (bool)((byte)(uVar430 >> 5) & 1);
            bVar26 = (bool)((byte)(uVar430 >> 6) & 1);
            bVar28 = SUB81(uVar430 >> 7,0);
            bVar14 = (bool)((byte)uVar431 & 1);
            auVar582._0_4_ =
                 (uint)bVar14 * ((uint)bVar12 * auVar677._0_4_ | (uint)!bVar12 * auVar678._0_4_) |
                 (uint)!bVar14 * ((uint)bVar13 * auVar674._0_4_ | (uint)!bVar13 * iVar424);
            bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
            auVar582._4_4_ =
                 (uint)bVar12 * ((uint)bVar15 * auVar677._4_4_ | (uint)!bVar15 * auVar678._4_4_) |
                 (uint)!bVar12 * ((uint)bVar16 * auVar674._4_4_ | (uint)!bVar16 * iVar426);
            bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
            auVar582._8_4_ =
                 (uint)bVar12 * ((uint)bVar17 * auVar677._8_4_ | (uint)!bVar17 * auVar678._8_4_) |
                 (uint)!bVar12 * ((uint)bVar18 * auVar674._8_4_ | (uint)!bVar18 * iVar1);
            bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
            auVar582._12_4_ =
                 (uint)bVar12 * ((uint)bVar19 * auVar677._12_4_ | (uint)!bVar19 * auVar678._12_4_) |
                 (uint)!bVar12 * ((uint)bVar20 * auVar674._12_4_ | (uint)!bVar20 * iVar2);
            bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
            auVar582._16_4_ =
                 (uint)bVar12 * ((uint)bVar21 * auVar677._16_4_ | (uint)!bVar21 * auVar678._16_4_) |
                 (uint)!bVar12 * ((uint)bVar22 * auVar674._16_4_ | (uint)!bVar22 * iVar3);
            bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
            auVar582._20_4_ =
                 (uint)bVar12 * ((uint)bVar23 * auVar677._20_4_ | (uint)!bVar23 * auVar678._20_4_) |
                 (uint)!bVar12 * ((uint)bVar24 * auVar674._20_4_ | (uint)!bVar24 * iVar6);
            bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
            auVar582._24_4_ =
                 (uint)bVar12 * ((uint)bVar25 * auVar677._24_4_ | (uint)!bVar25 * auVar678._24_4_) |
                 (uint)!bVar12 * ((uint)bVar26 * auVar674._24_4_ | (uint)!bVar26 * iVar5);
            bVar12 = SUB81(uVar431 >> 7,0);
            auVar582._28_4_ =
                 (uint)bVar12 * ((uint)bVar27 * auVar677._28_4_ | (uint)!bVar27 * auVar678._28_4_) |
                 (uint)!bVar12 * ((uint)bVar28 * auVar674._28_4_ | (uint)!bVar28 * iVar4);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar582;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)(uVar425 | 3) < (int)uVar427) {
          auVar941._8_4_ = 0x80000000;
          auVar941._0_8_ = 0x8000000080000000;
          auVar941._12_4_ = 0x80000000;
          auVar1030._8_4_ = 0x40490fdb;
          auVar1030._0_8_ = 0x40490fdb40490fdb;
          auVar1030._12_4_ = 0x40490fdb;
          auVar1113._8_4_ = 0x7fffffff;
          auVar1113._0_8_ = 0x7fffffff7fffffff;
          auVar1113._12_4_ = 0x7fffffff;
          auVar1165._8_4_ = 0x3f800000;
          auVar1165._0_8_ = 0x3f8000003f800000;
          auVar1165._12_4_ = 0x3f800000;
          auVar1219._8_4_ = 0xbc83a25c;
          auVar1219._0_8_ = 0xbc83a25cbc83a25c;
          auVar1219._12_4_ = 0xbc83a25c;
          auVar1283._8_4_ = 0xbd99b01e;
          auVar1283._0_8_ = 0xbd99b01ebd99b01e;
          auVar1283._12_4_ = 0xbd99b01e;
          auVar1346._8_4_ = 0xbe117200;
          auVar1346._0_8_ = 0xbe117200be117200;
          auVar1346._12_4_ = 0xbe117200;
          auVar1402._8_4_ = 0xbeaaaa53;
          auVar1402._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1402._12_4_ = 0xbeaaaa53;
          auVar1456._8_4_ = 0x3b3ac537;
          auVar1456._0_8_ = 0x3b3ac5373b3ac537;
          auVar1456._12_4_ = 0x3b3ac537;
          auVar1510._8_4_ = 0x3d2edd4e;
          auVar1510._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1510._12_4_ = 0x3d2edd4e;
          auVar1564._8_4_ = 0x3dd9ed24;
          auVar1564._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1564._12_4_ = 0x3dd9ed24;
          auVar1618._8_4_ = 0x3e4cb974;
          auVar1618._0_8_ = 0x3e4cb9743e4cb974;
          auVar1618._12_4_ = 0x3e4cb974;
          auVar1672._8_4_ = 0x3fc90fdb;
          auVar1672._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1672._12_4_ = 0x3fc90fdb;
          auVar1726._8_4_ = 0x40490fdb;
          auVar1726._0_8_ = 0x40490fdb40490fdb;
          auVar1726._12_4_ = 0x40490fdb;
          auVar1778._8_4_ = 0x3fc90fdb;
          auVar1778._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1778._12_4_ = 0x3fc90fdb;
          uVar882 = uVar425;
          do {
            auVar442 = *(undefined1 (*) [16])*(undefined1 (*) [64])ptr;
            auVar460 = *(undefined1 (*) [16])*(undefined1 (*) [64])ptr1;
            auVar461 = vdivps_avx512vl(auVar442,auVar460);
            uVar47 = vcmpps_avx512vl(auVar442,(undefined1  [16])0x0,1);
            auVar519 = vandps_avx512vl(auVar461,auVar1113);
            auVar59._8_4_ = 0xc0490fdb;
            auVar59._0_8_ = 0xc0490fdbc0490fdb;
            auVar59._12_4_ = 0xc0490fdb;
            auVar472 = vblendmps_avx512vl(auVar1030,auVar59);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar454._0_4_ = (uint)bVar12 * auVar472._0_4_ | (uint)!bVar12 * in_ZMM20._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar454._4_4_ = (uint)bVar12 * auVar472._4_4_ | (uint)!bVar12 * in_ZMM20._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar454._8_4_ = (uint)bVar12 * auVar472._8_4_ | (uint)!bVar12 * in_ZMM20._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar454._12_4_ = (uint)bVar12 * auVar472._12_4_ | (uint)!bVar12 * in_ZMM20._12_4_;
            in_ZMM20 = ZEXT1664(auVar454);
            uVar47 = vcmpps_avx512vl(auVar1165,auVar519,1);
            auVar60._8_4_ = 0xbf800000;
            auVar60._0_8_ = 0xbf800000bf800000;
            auVar60._12_4_ = 0xbf800000;
            auVar472 = vblendmps_avx512vl(auVar519,auVar60);
            bVar29 = (byte)uVar47;
            auVar455._0_4_ =
                 (uint)(bVar29 & 1) * auVar472._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM21._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar455._4_4_ = (uint)bVar12 * auVar472._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar455._8_4_ = (uint)bVar12 * auVar472._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar455._12_4_ = (uint)bVar12 * auVar472._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
            uVar430 = vcmpps_avx512vl(auVar442,(undefined1  [16])0x0,4);
            auVar519 = vdivps_avx512vl(auVar455,auVar519);
            auVar456._0_4_ =
                 (uint)(bVar29 & 1) * auVar519._0_4_ | !(bool)(bVar29 & 1) * auVar455._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar456._4_4_ = (uint)bVar12 * auVar519._4_4_ | !bVar12 * auVar455._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar456._8_4_ = (uint)bVar12 * auVar519._8_4_ | !bVar12 * auVar455._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar456._12_4_ = (uint)bVar12 * auVar519._12_4_ | !bVar12 * auVar455._12_4_;
            in_ZMM21 = ZEXT1664(auVar456);
            auVar519 = vmulps_avx512vl(auVar456,auVar456);
            uVar429 = vcmpps_avx512vl(auVar460,(undefined1  [16])0x0,1);
            auVar472 = vmulps_avx512vl(auVar519,auVar519);
            auVar464 = vfmadd213ps_avx512vl(auVar1219,auVar472,auVar1283);
            auVar464 = vfmadd213ps_avx512vl(auVar464,auVar472,auVar1346);
            auVar465 = vfmadd213ps_avx512vl(auVar1456,auVar472,auVar1510);
            auVar465 = vfmadd213ps_avx512vl(auVar465,auVar472,auVar1564);
            auVar464 = vfmadd213ps_avx512vl(auVar464,auVar472,auVar1402);
            auVar465 = vfmadd213ps_avx512vl(auVar465,auVar472,auVar1618);
            auVar472 = vfmadd213ps_avx512vl(auVar465,auVar472,auVar1165);
            auVar519 = vfmadd231ps_avx512vl(auVar472,auVar519,auVar464);
            uVar431 = vcmpps_avx512vl(auVar460,(undefined1  [16])0x0,4);
            uVar431 = uVar430 & uVar431;
            auVar519 = vmulps_avx512vl(auVar519,auVar456);
            auVar472 = vaddps_avx512vl(auVar519,auVar1672);
            auVar457._0_4_ =
                 (uint)(bVar29 & 1) * auVar472._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar519._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar457._4_4_ = (uint)bVar12 * auVar472._4_4_ | (uint)!bVar12 * auVar519._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar457._8_4_ = (uint)bVar12 * auVar472._8_4_ | (uint)!bVar12 * auVar519._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar457._12_4_ = (uint)bVar12 * auVar472._12_4_ | (uint)!bVar12 * auVar519._12_4_;
            auVar460 = vpternlogd_avx512vl(auVar460,auVar1726,auVar941,0xec);
            auVar461 = vpternlogd_avx512vl(auVar457,auVar461,auVar941,0xf8);
            uVar46 = vcmpps_avx512vl((undefined1  [16])0x0,auVar460,2);
            uVar48 = ~((ushort)uVar430 | (ushort)uVar46);
            auVar460 = vaddps_avx512vl(auVar461,auVar454);
            bVar12 = (bool)((byte)uVar429 & 1);
            bVar15 = (bool)((byte)(uVar429 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar429 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar429 >> 3) & 1);
            auVar519 = vmovdqa32_avx512vl(auVar1726);
            iVar426 = (uint)((byte)uVar48 & 1) * auVar519._0_4_;
            iVar1 = (uint)((byte)(uVar48 >> 1) & 1) * auVar519._4_4_;
            auVar458._4_4_ = iVar1;
            auVar458._0_4_ = iVar426;
            iVar424 = (uint)((byte)(uVar48 >> 2) & 1) * auVar519._8_4_;
            auVar458._8_4_ = iVar424;
            iVar2 = (uint)((byte)(uVar48 >> 3) & 1) * auVar519._12_4_;
            auVar458._12_4_ = iVar2;
            auVar442 = vpternlogd_avx512vl(auVar442,auVar458,auVar941,0xec);
            auVar442 = vpord_avx512vl(auVar442,auVar1778);
            bVar13 = (bool)((byte)uVar430 & 1);
            bVar16 = (bool)((byte)(uVar430 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar430 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar430 >> 3) & 1);
            bVar14 = (bool)((byte)uVar431 & 1);
            auVar459._0_4_ =
                 (uint)bVar14 * ((uint)bVar12 * auVar460._0_4_ | (uint)!bVar12 * auVar461._0_4_) |
                 (uint)!bVar14 * ((uint)bVar13 * auVar442._0_4_ | (uint)!bVar13 * iVar426);
            bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
            auVar459._4_4_ =
                 (uint)bVar12 * ((uint)bVar15 * auVar460._4_4_ | (uint)!bVar15 * auVar461._4_4_) |
                 (uint)!bVar12 * ((uint)bVar16 * auVar442._4_4_ | (uint)!bVar16 * iVar1);
            bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
            auVar459._8_4_ =
                 (uint)bVar12 * ((uint)bVar17 * auVar460._8_4_ | (uint)!bVar17 * auVar461._8_4_) |
                 (uint)!bVar12 * ((uint)bVar18 * auVar442._8_4_ | (uint)!bVar18 * iVar424);
            bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
            auVar459._12_4_ =
                 (uint)bVar12 * ((uint)bVar19 * auVar460._12_4_ | (uint)!bVar19 * auVar461._12_4_) |
                 (uint)!bVar12 * ((uint)bVar20 * auVar442._12_4_ | (uint)!bVar20 * iVar2);
            *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar459;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
            uVar425 = uVar882 + 4;
            iVar424 = uVar882 + 7;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          return;
        }
        lVar428 = 0;
        do {
          fVar890 = atan2f(*(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4),
                           *(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4));
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = fVar890;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (bw == 1) {
        fVar890 = *ptr1;
        if (iVar424 == 4) {
          auVar442 = vmovdqa64_avx512vl(ZEXT416((uint)fVar890));
          auVar893 = *(undefined1 (*) [16])ptr1;
        }
        else {
          auVar442 = vmovdqa64_avx512vl(ZEXT416((uint)fVar890));
          auVar893._4_4_ = fVar890;
          auVar893._0_4_ = fVar890;
          auVar893._8_4_ = fVar890;
          auVar893._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar734 = ZEXT3264(*(undefined1 (*) [32])ptr1);
        }
        else {
          auVar734._0_16_ = ZEXT116(0) * auVar893 + ZEXT116(1) * auVar893;
          auVar734._16_16_ = ZEXT116(1) * auVar893;
        }
        auVar674 = auVar734._0_32_;
        if (iVar424 == 0x10) {
          auVar734 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
        }
        else {
          auVar734 = vinserti64x4_avx512f(auVar734,auVar674,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          auVar716 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar729._8_4_ = 0x80000000;
          auVar729._0_8_ = 0x8000000080000000;
          auVar729._12_4_ = 0x80000000;
          auVar729._16_4_ = 0x80000000;
          auVar729._20_4_ = 0x80000000;
          auVar729._24_4_ = 0x80000000;
          auVar729._28_4_ = 0x80000000;
          auVar729._32_4_ = 0x80000000;
          auVar729._36_4_ = 0x80000000;
          auVar729._40_4_ = 0x80000000;
          auVar729._44_4_ = 0x80000000;
          auVar729._48_4_ = 0x80000000;
          auVar729._52_4_ = 0x80000000;
          auVar729._56_4_ = 0x80000000;
          auVar729._60_4_ = 0x80000000;
          auVar716 = vpternlogd_avx512f(auVar716,auVar734,auVar729,0xf8);
          auVar737 = ZEXT1264(ZEXT812(0));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          uVar47 = vcmpps_avx512f(auVar716,auVar737,1);
          auVar716 = vdivps_avx512f(auVar717,auVar734);
          auVar718 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar730._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar718._4_4_;
          auVar730._0_4_ = (uint)((byte)uVar47 & 1) * auVar718._0_4_;
          auVar730._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar718._8_4_;
          auVar730._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar718._12_4_;
          auVar730._16_4_ = (uint)((byte)(uVar47 >> 4) & 1) * auVar718._16_4_;
          auVar730._20_4_ = (uint)((byte)(uVar47 >> 5) & 1) * auVar718._20_4_;
          auVar730._24_4_ = (uint)((byte)(uVar47 >> 6) & 1) * auVar718._24_4_;
          auVar730._28_4_ = (uint)((byte)(uVar47 >> 7) & 1) * auVar718._28_4_;
          auVar730._32_4_ = (uint)((byte)(uVar47 >> 8) & 1) * auVar718._32_4_;
          auVar730._36_4_ = (uint)((byte)(uVar47 >> 9) & 1) * auVar718._36_4_;
          auVar730._40_4_ = (uint)((byte)(uVar47 >> 10) & 1) * auVar718._40_4_;
          auVar730._44_4_ = (uint)((byte)(uVar47 >> 0xb) & 1) * auVar718._44_4_;
          auVar730._48_4_ = (uint)((byte)(uVar47 >> 0xc) & 1) * auVar718._48_4_;
          auVar730._52_4_ = (uint)((byte)(uVar47 >> 0xd) & 1) * auVar718._52_4_;
          auVar730._56_4_ = (uint)((byte)(uVar47 >> 0xe) & 1) * auVar718._56_4_;
          auVar730._60_4_ = (uint)(byte)(uVar47 >> 0xf) * auVar718._60_4_;
          iVar424 = 0xf;
          uVar47 = vcmpps_avx512f(auVar734,auVar737,1);
          auVar718 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar725 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar726 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar727 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar728 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar729 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          uVar430 = vcmpps_avx512f(auVar734,auVar737,4);
          auVar1774 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar734 = in_ZMM22;
          do {
            auVar852 = *(undefined1 (*) [64])ptr;
            auVar733 = vmulps_avx512f(auVar852,auVar716);
            uVar429 = vcmpps_avx512f(auVar852,auVar737,1);
            auVar736 = vandps_avx512dq(auVar733,auVar720);
            auVar340._8_4_ = 0xc0490fdb;
            auVar340._0_8_ = 0xc0490fdbc0490fdb;
            auVar340._12_4_ = 0xc0490fdb;
            auVar340._16_4_ = 0xc0490fdb;
            auVar340._20_4_ = 0xc0490fdb;
            auVar340._24_4_ = 0xc0490fdb;
            auVar340._28_4_ = 0xc0490fdb;
            auVar340._32_4_ = 0xc0490fdb;
            auVar340._36_4_ = 0xc0490fdb;
            auVar340._40_4_ = 0xc0490fdb;
            auVar340._44_4_ = 0xc0490fdb;
            auVar340._48_4_ = 0xc0490fdb;
            auVar340._52_4_ = 0xc0490fdb;
            auVar340._56_4_ = 0xc0490fdb;
            auVar340._60_4_ = 0xc0490fdb;
            auVar731 = vblendmps_avx512f(auVar719,auVar340);
            bVar12 = (bool)((byte)uVar429 & 1);
            in_ZMM22._0_4_ = (uint)bVar12 * auVar731._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
            in_ZMM22._4_4_ = (uint)bVar12 * auVar731._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
            in_ZMM22._8_4_ = (uint)bVar12 * auVar731._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
            in_ZMM22._12_4_ = (uint)bVar12 * auVar731._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
            in_ZMM22._16_4_ = (uint)bVar12 * auVar731._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
            in_ZMM22._20_4_ = (uint)bVar12 * auVar731._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
            in_ZMM22._24_4_ = (uint)bVar12 * auVar731._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
            in_ZMM22._28_4_ = (uint)bVar12 * auVar731._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)((byte)(uVar429 >> 8) & 1);
            in_ZMM22._32_4_ = (uint)bVar12 * auVar731._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
            in_ZMM22._36_4_ = (uint)bVar12 * auVar731._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
            in_ZMM22._40_4_ = (uint)bVar12 * auVar731._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
            in_ZMM22._44_4_ = (uint)bVar12 * auVar731._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
            in_ZMM22._48_4_ = (uint)bVar12 * auVar731._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
            in_ZMM22._52_4_ = (uint)bVar12 * auVar731._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
            in_ZMM22._56_4_ = (uint)bVar12 * auVar731._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar429 >> 0xf,0);
            in_ZMM22._60_4_ = (uint)bVar12 * auVar731._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            uVar429 = vcmpps_avx512f(auVar717,auVar736,1);
            auVar341._8_4_ = 0xbf800000;
            auVar341._0_8_ = 0xbf800000bf800000;
            auVar341._12_4_ = 0xbf800000;
            auVar341._16_4_ = 0xbf800000;
            auVar341._20_4_ = 0xbf800000;
            auVar341._24_4_ = 0xbf800000;
            auVar341._28_4_ = 0xbf800000;
            auVar341._32_4_ = 0xbf800000;
            auVar341._36_4_ = 0xbf800000;
            auVar341._40_4_ = 0xbf800000;
            auVar341._44_4_ = 0xbf800000;
            auVar341._48_4_ = 0xbf800000;
            auVar341._52_4_ = 0xbf800000;
            auVar341._56_4_ = 0xbf800000;
            auVar341._60_4_ = 0xbf800000;
            auVar734 = vblendmps_avx512f(auVar736,auVar341);
            bVar12 = (bool)((byte)uVar429 & 1);
            auVar864._0_4_ = (uint)bVar12 * auVar734._0_4_ | (uint)!bVar12 * in_ZMM23._0_4_;
            bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
            auVar864._4_4_ = (uint)bVar12 * auVar734._4_4_ | (uint)!bVar12 * in_ZMM23._4_4_;
            bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
            auVar864._8_4_ = (uint)bVar12 * auVar734._8_4_ | (uint)!bVar12 * in_ZMM23._8_4_;
            bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
            auVar864._12_4_ = (uint)bVar12 * auVar734._12_4_ | (uint)!bVar12 * in_ZMM23._12_4_;
            bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
            auVar864._16_4_ = (uint)bVar12 * auVar734._16_4_ | (uint)!bVar12 * in_ZMM23._16_4_;
            bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
            auVar864._20_4_ = (uint)bVar12 * auVar734._20_4_ | (uint)!bVar12 * in_ZMM23._20_4_;
            bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
            auVar864._24_4_ = (uint)bVar12 * auVar734._24_4_ | (uint)!bVar12 * in_ZMM23._24_4_;
            bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
            auVar864._28_4_ = (uint)bVar12 * auVar734._28_4_ | (uint)!bVar12 * in_ZMM23._28_4_;
            bVar29 = (byte)(uVar429 >> 8);
            bVar12 = (bool)(bVar29 & 1);
            auVar864._32_4_ = (uint)bVar12 * auVar734._32_4_ | (uint)!bVar12 * in_ZMM23._32_4_;
            bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
            auVar864._36_4_ = (uint)bVar12 * auVar734._36_4_ | (uint)!bVar12 * in_ZMM23._36_4_;
            bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
            auVar864._40_4_ = (uint)bVar12 * auVar734._40_4_ | (uint)!bVar12 * in_ZMM23._40_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
            auVar864._44_4_ = (uint)bVar12 * auVar734._44_4_ | (uint)!bVar12 * in_ZMM23._44_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
            auVar864._48_4_ = (uint)bVar12 * auVar734._48_4_ | (uint)!bVar12 * in_ZMM23._48_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
            auVar864._52_4_ = (uint)bVar12 * auVar734._52_4_ | (uint)!bVar12 * in_ZMM23._52_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
            auVar864._56_4_ = (uint)bVar12 * auVar734._56_4_ | (uint)!bVar12 * in_ZMM23._56_4_;
            bVar12 = SUB81(uVar429 >> 0xf,0);
            auVar864._60_4_ = (uint)bVar12 * auVar734._60_4_ | (uint)!bVar12 * in_ZMM23._60_4_;
            auVar734 = vmaxps_avx512f(auVar736,auVar717);
            auVar734 = vdivps_avx512f(auVar864,auVar734);
            in_ZMM23 = vmulps_avx512f(auVar734,auVar734);
            auVar736 = vmulps_avx512f(in_ZMM23,in_ZMM23);
            auVar731 = vfmadd213ps_avx512f(auVar721,auVar736,auVar722);
            auVar731 = vfmadd213ps_avx512f(auVar731,auVar736,auVar723);
            auVar732 = vfmadd213ps_avx512f(auVar725,auVar736,auVar726);
            auVar732 = vfmadd213ps_avx512f(auVar732,auVar736,auVar727);
            auVar732 = vfmadd213ps_avx512f(auVar732,auVar736,auVar728);
            auVar731 = vfmadd213ps_avx512f(auVar731,auVar736,auVar724);
            auVar736 = vfmadd213ps_avx512f(auVar732,auVar736,auVar717);
            auVar736 = vfmadd231ps_avx512f(auVar736,in_ZMM23,auVar731);
            auVar734 = vmulps_avx512f(auVar736,auVar734);
            uVar431 = vcmpps_avx512f(auVar852,auVar737,4);
            auVar736 = vaddps_avx512f(auVar734,auVar729);
            bVar12 = (bool)((byte)uVar429 & 1);
            auVar865._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
            auVar865._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
            auVar865._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
            auVar865._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
            auVar865._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
            auVar865._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
            auVar865._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
            auVar865._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)(bVar29 & 1);
            auVar865._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
            auVar865._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
            auVar865._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
            auVar865._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
            auVar865._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
            auVar865._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
            auVar865._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar429 >> 0xf,0);
            auVar865._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            auVar734 = vpternlogd_avx512f(auVar865,auVar733,auVar718,0xf8);
            auVar733 = vaddps_avx512f(auVar734,in_ZMM22);
            bVar12 = (bool)((byte)uVar47 & 1);
            in_ZMM21._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            in_ZMM21._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            in_ZMM21._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            in_ZMM21._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            in_ZMM21._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            in_ZMM21._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            in_ZMM21._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            in_ZMM21._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            in_ZMM21._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            in_ZMM21._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            in_ZMM21._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            in_ZMM21._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            in_ZMM21._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            in_ZMM21._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            in_ZMM21._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            in_ZMM21._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            auVar734 = vpternlogd_avx512f(auVar852,auVar718,auVar1774,0xea);
            bVar12 = (bool)((byte)uVar430 & 1);
            auVar866._0_4_ = bVar12 * in_ZMM21._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar866._4_4_ = bVar12 * in_ZMM21._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar866._8_4_ = bVar12 * in_ZMM21._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar866._12_4_ = bVar12 * in_ZMM21._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar866._16_4_ = bVar12 * in_ZMM21._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar866._20_4_ = bVar12 * in_ZMM21._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar866._24_4_ = bVar12 * in_ZMM21._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
            auVar866._28_4_ = bVar12 * in_ZMM21._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)((byte)(uVar430 >> 8) & 1);
            auVar866._32_4_ = bVar12 * in_ZMM21._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
            auVar866._36_4_ = bVar12 * in_ZMM21._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
            auVar866._40_4_ = bVar12 * in_ZMM21._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
            auVar866._44_4_ = bVar12 * in_ZMM21._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
            auVar866._48_4_ = bVar12 * in_ZMM21._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
            auVar866._52_4_ = bVar12 * in_ZMM21._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
            auVar866._56_4_ = bVar12 * in_ZMM21._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar430 >> 0xf,0);
            auVar866._60_4_ = bVar12 * in_ZMM21._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            auVar734 = vblendmps_avx512f(auVar730,auVar866);
            bVar12 = (bool)((byte)uVar431 & 1);
            bVar13 = (bool)((byte)(uVar431 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar431 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar431 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar431 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar431 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar431 >> 6) & 1);
            bVar19 = (bool)((byte)(uVar431 >> 7) & 1);
            bVar20 = (bool)((byte)(uVar431 >> 8) & 1);
            bVar21 = (bool)((byte)(uVar431 >> 9) & 1);
            bVar22 = (bool)((byte)(uVar431 >> 10) & 1);
            bVar23 = (bool)((byte)(uVar431 >> 0xb) & 1);
            bVar24 = (bool)((byte)(uVar431 >> 0xc) & 1);
            bVar25 = (bool)((byte)(uVar431 >> 0xd) & 1);
            bVar26 = (bool)((byte)(uVar431 >> 0xe) & 1);
            bVar27 = SUB81(uVar431 >> 0xf,0);
            *outptr = (float)((uint)bVar12 * auVar734._0_4_ | !bVar12 * auVar866._0_4_);
            outptr[1] = (float)((uint)bVar13 * auVar734._4_4_ | !bVar13 * auVar866._4_4_);
            outptr[2] = (float)((uint)bVar14 * auVar734._8_4_ | !bVar14 * auVar866._8_4_);
            outptr[3] = (float)((uint)bVar15 * auVar734._12_4_ | !bVar15 * auVar866._12_4_);
            outptr[4] = (float)((uint)bVar16 * auVar734._16_4_ | !bVar16 * auVar866._16_4_);
            outptr[5] = (float)((uint)bVar17 * auVar734._20_4_ | !bVar17 * auVar866._20_4_);
            outptr[6] = (float)((uint)bVar18 * auVar734._24_4_ | !bVar18 * auVar866._24_4_);
            outptr[7] = (float)((uint)bVar19 * auVar734._28_4_ | !bVar19 * auVar866._28_4_);
            outptr[8] = (float)((uint)bVar20 * auVar734._32_4_ | !bVar20 * auVar866._32_4_);
            outptr[9] = (float)((uint)bVar21 * auVar734._36_4_ | !bVar21 * auVar866._36_4_);
            outptr[10] = (float)((uint)bVar22 * auVar734._40_4_ | !bVar22 * auVar866._40_4_);
            outptr[0xb] = (float)((uint)bVar23 * auVar734._44_4_ | !bVar23 * auVar866._44_4_);
            outptr[0xc] = (float)((uint)bVar24 * auVar734._48_4_ | !bVar24 * auVar866._48_4_);
            outptr[0xd] = (float)((uint)bVar25 * auVar734._52_4_ | !bVar25 * auVar866._52_4_);
            outptr[0xe] = (float)((uint)bVar26 * auVar734._56_4_ | !bVar26 * auVar866._56_4_);
            outptr[0xf] = (float)((uint)bVar27 * auVar734._60_4_ | !bVar27 * auVar866._60_4_);
            ptr = (float *)((long)ptr + 0x40);
            outptr = outptr + 0x10;
            iVar424 = iVar424 + 0x10;
            auVar734 = in_ZMM22;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        if ((int)(uVar425 | 7) < (int)uVar427) {
          auVar1093._8_4_ = 0x40490fdb;
          auVar1093._0_8_ = 0x40490fdb40490fdb;
          auVar1093._12_4_ = 0x40490fdb;
          auVar1093._16_4_ = 0x40490fdb;
          auVar1093._20_4_ = 0x40490fdb;
          auVar1093._24_4_ = 0x40490fdb;
          auVar1093._28_4_ = 0x40490fdb;
          auVar1336._8_4_ = 0x80000000;
          auVar1336._0_8_ = 0x8000000080000000;
          auVar1336._12_4_ = 0x80000000;
          auVar1336._16_4_ = 0x80000000;
          auVar1336._20_4_ = 0x80000000;
          auVar1336._24_4_ = 0x80000000;
          auVar1336._28_4_ = 0x80000000;
          auVar678 = vpternlogd_avx512vl(auVar1336,auVar674,auVar1093,0xea);
          auVar1153._8_4_ = 0x3f800000;
          auVar1153._0_8_ = 0x3f8000003f800000;
          auVar1153._12_4_ = 0x3f800000;
          auVar1153._16_4_ = 0x3f800000;
          auVar1153._20_4_ = 0x3f800000;
          auVar1153._24_4_ = 0x3f800000;
          auVar1153._28_4_ = 0x3f800000;
          auVar677 = vdivps_avx(auVar1153,auVar674);
          auVar460 = ZEXT816(0) << 0x40;
          uVar46 = vcmpps_avx512vl(ZEXT1632(auVar460),auVar678,2);
          uVar47 = vcmpps_avx512vl(auVar674,ZEXT1632(auVar460),1);
          auVar1337._8_4_ = 0x80000000;
          auVar1337._0_8_ = 0x8000000080000000;
          auVar1337._12_4_ = 0x80000000;
          auVar1337._16_4_ = 0x80000000;
          auVar1337._20_4_ = 0x80000000;
          auVar1337._24_4_ = 0x80000000;
          auVar1337._28_4_ = 0x80000000;
          auVar1393._8_4_ = 0x40490fdb;
          auVar1393._0_8_ = 0x40490fdb40490fdb;
          auVar1393._12_4_ = 0x40490fdb;
          auVar1393._16_4_ = 0x40490fdb;
          auVar1393._20_4_ = 0x40490fdb;
          auVar1393._24_4_ = 0x40490fdb;
          auVar1393._28_4_ = 0x40490fdb;
          auVar1449._8_4_ = 0x7fffffff;
          auVar1449._0_8_ = 0x7fffffff7fffffff;
          auVar1449._12_4_ = 0x7fffffff;
          auVar1449._16_4_ = 0x7fffffff;
          auVar1449._20_4_ = 0x7fffffff;
          auVar1449._24_4_ = 0x7fffffff;
          auVar1449._28_4_ = 0x7fffffff;
          auVar1503._8_4_ = 0xbc83a25c;
          auVar1503._0_8_ = 0xbc83a25cbc83a25c;
          auVar1503._12_4_ = 0xbc83a25c;
          auVar1503._16_4_ = 0xbc83a25c;
          auVar1503._20_4_ = 0xbc83a25c;
          auVar1503._24_4_ = 0xbc83a25c;
          auVar1503._28_4_ = 0xbc83a25c;
          auVar1557._8_4_ = 0xbd99b01e;
          auVar1557._0_8_ = 0xbd99b01ebd99b01e;
          auVar1557._12_4_ = 0xbd99b01e;
          auVar1557._16_4_ = 0xbd99b01e;
          auVar1557._20_4_ = 0xbd99b01e;
          auVar1557._24_4_ = 0xbd99b01e;
          auVar1557._28_4_ = 0xbd99b01e;
          auVar1611._8_4_ = 0xbe117200;
          auVar1611._0_8_ = 0xbe117200be117200;
          auVar1611._12_4_ = 0xbe117200;
          auVar1611._16_4_ = 0xbe117200;
          auVar1611._20_4_ = 0xbe117200;
          auVar1611._24_4_ = 0xbe117200;
          auVar1611._28_4_ = 0xbe117200;
          auVar1665._8_4_ = 0xbeaaaa53;
          auVar1665._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1665._12_4_ = 0xbeaaaa53;
          auVar1665._16_4_ = 0xbeaaaa53;
          auVar1665._20_4_ = 0xbeaaaa53;
          auVar1665._24_4_ = 0xbeaaaa53;
          auVar1665._28_4_ = 0xbeaaaa53;
          auVar1719._8_4_ = 0x3b3ac537;
          auVar1719._0_8_ = 0x3b3ac5373b3ac537;
          auVar1719._12_4_ = 0x3b3ac537;
          auVar1719._16_4_ = 0x3b3ac537;
          auVar1719._20_4_ = 0x3b3ac537;
          auVar1719._24_4_ = 0x3b3ac537;
          auVar1719._28_4_ = 0x3b3ac537;
          auVar1769._8_4_ = 0x3d2edd4e;
          auVar1769._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1769._12_4_ = 0x3d2edd4e;
          auVar1769._16_4_ = 0x3d2edd4e;
          auVar1769._20_4_ = 0x3d2edd4e;
          auVar1769._24_4_ = 0x3d2edd4e;
          auVar1769._28_4_ = 0x3d2edd4e;
          auVar1818._8_4_ = 0x3dd9ed24;
          auVar1818._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1818._12_4_ = 0x3dd9ed24;
          auVar1818._16_4_ = 0x3dd9ed24;
          auVar1818._20_4_ = 0x3dd9ed24;
          auVar1818._24_4_ = 0x3dd9ed24;
          auVar1818._28_4_ = 0x3dd9ed24;
          auVar678 = vbroadcastss_avx512vl(ZEXT416(0x3e4cb974));
          auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          auVar679 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          uVar882 = uVar425;
          do {
            auVar680 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
            auVar683 = vmulps_avx512vl(auVar680,auVar677);
            auVar565 = ZEXT1632(auVar460);
            uVar430 = vcmpps_avx512vl(auVar680,auVar565,1);
            vandps_avx512vl(auVar683,auVar1449);
            auVar185._8_4_ = 0xc0490fdb;
            auVar185._0_8_ = 0xc0490fdbc0490fdb;
            auVar185._12_4_ = 0xc0490fdb;
            auVar185._16_4_ = 0xc0490fdb;
            auVar185._20_4_ = 0xc0490fdb;
            auVar185._24_4_ = 0xc0490fdb;
            auVar185._28_4_ = 0xc0490fdb;
            auVar684 = vblendmps_avx512vl(auVar1393,auVar185);
            bVar12 = (bool)((byte)uVar430 & 1);
            auVar693._0_4_ = (uint)bVar12 * auVar684._0_4_ | (uint)!bVar12 * in_ZMM22._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar693._4_4_ = (uint)bVar12 * auVar684._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar693._8_4_ = (uint)bVar12 * auVar684._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar693._12_4_ = (uint)bVar12 * auVar684._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar693._16_4_ = (uint)bVar12 * auVar684._16_4_ | (uint)!bVar12 * in_ZMM22._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar693._20_4_ = (uint)bVar12 * auVar684._20_4_ | (uint)!bVar12 * in_ZMM22._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar693._24_4_ = (uint)bVar12 * auVar684._24_4_ | (uint)!bVar12 * in_ZMM22._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar693._28_4_ = (uint)bVar12 * auVar684._28_4_ | (uint)!bVar12 * in_ZMM22._28_4_;
            in_ZMM22 = ZEXT3264(auVar693);
            uVar430 = vcmpps_avx512vl(auVar1153,auVar683,1);
            auVar186._8_4_ = 0xbf800000;
            auVar186._0_8_ = 0xbf800000bf800000;
            auVar186._12_4_ = 0xbf800000;
            auVar186._16_4_ = 0xbf800000;
            auVar186._20_4_ = 0xbf800000;
            auVar186._24_4_ = 0xbf800000;
            auVar186._28_4_ = 0xbf800000;
            auVar684 = vblendmps_avx512vl(auVar683,auVar186);
            bVar29 = (byte)uVar430;
            auVar694._0_4_ =
                 (uint)(bVar29 & 1) * auVar684._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM23._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar694._4_4_ = (uint)bVar12 * auVar684._4_4_ | (uint)!bVar12 * in_ZMM23._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar694._8_4_ = (uint)bVar12 * auVar684._8_4_ | (uint)!bVar12 * in_ZMM23._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar694._12_4_ = (uint)bVar12 * auVar684._12_4_ | (uint)!bVar12 * in_ZMM23._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar694._16_4_ = (uint)bVar12 * auVar684._16_4_ | (uint)!bVar12 * in_ZMM23._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar694._20_4_ = (uint)bVar12 * auVar684._20_4_ | (uint)!bVar12 * in_ZMM23._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar694._24_4_ = (uint)bVar12 * auVar684._24_4_ | (uint)!bVar12 * in_ZMM23._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar694._28_4_ = (uint)bVar12 * auVar684._28_4_ | (uint)!bVar12 * in_ZMM23._28_4_;
            auVar684 = vdivps_avx512vl(auVar694,auVar683);
            auVar695._0_4_ =
                 (uint)(bVar29 & 1) * auVar684._0_4_ | !(bool)(bVar29 & 1) * auVar694._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar695._4_4_ = (uint)bVar12 * auVar684._4_4_ | !bVar12 * auVar694._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar695._8_4_ = (uint)bVar12 * auVar684._8_4_ | !bVar12 * auVar694._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar695._12_4_ = (uint)bVar12 * auVar684._12_4_ | !bVar12 * auVar694._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar695._16_4_ = (uint)bVar12 * auVar684._16_4_ | !bVar12 * auVar694._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar695._20_4_ = (uint)bVar12 * auVar684._20_4_ | !bVar12 * auVar694._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar695._24_4_ = (uint)bVar12 * auVar684._24_4_ | !bVar12 * auVar694._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar695._28_4_ = (uint)bVar12 * auVar684._28_4_ | !bVar12 * auVar694._28_4_;
            in_ZMM23 = ZEXT3264(auVar695);
            uVar429 = vcmpps_avx512vl(auVar680,auVar565,4);
            auVar684 = vmulps_avx512vl(auVar695,auVar695);
            vandps_avx512vl(auVar680,auVar1337);
            auVar680 = vmulps_avx512vl(auVar684,auVar684);
            auVar685 = vfmadd213ps_avx512vl(auVar1503,auVar680,auVar1557);
            auVar685 = vfmadd213ps_avx512vl(auVar685,auVar680,auVar1611);
            auVar701 = vfmadd213ps_avx512vl(auVar1719,auVar680,auVar1769);
            auVar701 = vfmadd213ps_avx512vl(auVar701,auVar680,auVar1818);
            auVar685 = vfmadd213ps_avx512vl(auVar685,auVar680,auVar1665);
            auVar701 = vfmadd213ps_avx512vl(auVar701,auVar680,auVar678);
            auVar680 = vfmadd213ps_avx512vl(auVar701,auVar680,auVar1153);
            auVar680 = vfmadd231ps_avx512vl(auVar680,auVar684,auVar685);
            uVar431 = vcmpps_avx512vl(auVar674,auVar565,4);
            uVar431 = uVar429 & uVar431;
            auVar680 = vmulps_avx512vl(auVar680,auVar695);
            auVar685 = vaddps_avx512vl(auVar680,auVar562);
            auVar696._0_4_ =
                 (uint)(bVar29 & 1) * auVar685._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar680._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar696._4_4_ = (uint)bVar12 * auVar685._4_4_ | (uint)!bVar12 * auVar680._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar696._8_4_ = (uint)bVar12 * auVar685._8_4_ | (uint)!bVar12 * auVar680._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar696._12_4_ = (uint)bVar12 * auVar685._12_4_ | (uint)!bVar12 * auVar680._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar696._16_4_ = (uint)bVar12 * auVar685._16_4_ | (uint)!bVar12 * auVar680._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar696._20_4_ = (uint)bVar12 * auVar685._20_4_ | (uint)!bVar12 * auVar680._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar696._24_4_ = (uint)bVar12 * auVar685._24_4_ | (uint)!bVar12 * auVar680._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar696._28_4_ = (uint)bVar12 * auVar685._28_4_ | (uint)!bVar12 * auVar680._28_4_;
            auVar680 = vpternlogd_avx512vl(auVar696,auVar683,auVar1337,0xf8);
            auVar683 = vaddps_avx512vl(auVar680,auVar693);
            bVar12 = (bool)((byte)uVar47 & 1);
            uVar425 = (uint)bVar12 * auVar683._0_4_ | (uint)!bVar12 * auVar680._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            uVar883 = (uint)bVar12 * auVar683._4_4_ | (uint)!bVar12 * auVar680._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            uVar884 = (uint)bVar12 * auVar683._8_4_ | (uint)!bVar12 * auVar680._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            uVar885 = (uint)bVar12 * auVar683._12_4_ | (uint)!bVar12 * auVar680._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            uVar886 = (uint)bVar12 * auVar683._16_4_ | (uint)!bVar12 * auVar680._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            uVar887 = (uint)bVar12 * auVar683._20_4_ | (uint)!bVar12 * auVar680._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            uVar888 = (uint)bVar12 * auVar683._24_4_ | (uint)!bVar12 * auVar680._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            uVar889 = (uint)bVar12 * auVar683._28_4_ | (uint)!bVar12 * auVar680._28_4_;
            in_ZMM21 = ZEXT3264(CONCAT428(uVar889,CONCAT424(uVar888,CONCAT420(uVar887,CONCAT416(
                                                  uVar886,CONCAT412(uVar885,CONCAT48(uVar884,
                                                  CONCAT44(uVar883,uVar425))))))));
            auVar680 = vorps_avx512vl(auVar684,auVar679);
            auVar697._4_4_ = (uint)((byte)(uVar429 >> 1) & 1) * auVar680._4_4_;
            auVar697._0_4_ = (uint)((byte)uVar429 & 1) * auVar680._0_4_;
            auVar697._8_4_ = (uint)((byte)(uVar429 >> 2) & 1) * auVar680._8_4_;
            auVar697._12_4_ = (uint)((byte)(uVar429 >> 3) & 1) * auVar680._12_4_;
            auVar697._16_4_ = (uint)((byte)(uVar429 >> 4) & 1) * auVar680._16_4_;
            auVar697._20_4_ = (uint)((byte)(uVar429 >> 5) & 1) * auVar680._20_4_;
            auVar697._24_4_ = (uint)((byte)(uVar429 >> 6) & 1) * auVar680._24_4_;
            auVar697._28_4_ = (uint)(byte)(uVar429 >> 7) * auVar680._28_4_;
            bVar29 = (byte)uVar429 | (byte)uVar46;
            auVar680 = vorps_avx512vl(auVar697,auVar1093);
            auVar683 = vmovdqa32_avx512vl(auVar697);
            bVar13 = (bool)(bVar29 >> 1 & 1);
            bVar15 = (bool)(bVar29 >> 2 & 1);
            bVar17 = (bool)(bVar29 >> 3 & 1);
            bVar19 = (bool)(bVar29 >> 4 & 1);
            bVar21 = (bool)(bVar29 >> 5 & 1);
            bVar23 = (bool)(bVar29 >> 6 & 1);
            bVar12 = (bool)((byte)uVar431 & 1);
            bVar14 = (bool)((byte)(uVar431 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar431 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar431 >> 3) & 1);
            bVar20 = (bool)((byte)(uVar431 >> 4) & 1);
            bVar22 = (bool)((byte)(uVar431 >> 5) & 1);
            bVar24 = (bool)((byte)(uVar431 >> 6) & 1);
            bVar25 = SUB81(uVar431 >> 7,0);
            *outptr = (float)(bVar12 * uVar425 |
                             (uint)!bVar12 *
                             ((uint)(bVar29 & 1) * auVar683._0_4_ |
                             (uint)!(bool)(bVar29 & 1) * auVar680._0_4_));
            outptr[1] = (float)(bVar14 * uVar883 |
                               (uint)!bVar14 *
                               ((uint)bVar13 * auVar683._4_4_ | (uint)!bVar13 * auVar680._4_4_));
            outptr[2] = (float)(bVar16 * uVar884 |
                               (uint)!bVar16 *
                               ((uint)bVar15 * auVar683._8_4_ | (uint)!bVar15 * auVar680._8_4_));
            outptr[3] = (float)(bVar18 * uVar885 |
                               (uint)!bVar18 *
                               ((uint)bVar17 * auVar683._12_4_ | (uint)!bVar17 * auVar680._12_4_));
            outptr[4] = (float)(bVar20 * uVar886 |
                               (uint)!bVar20 *
                               ((uint)bVar19 * auVar683._16_4_ | (uint)!bVar19 * auVar680._16_4_));
            outptr[5] = (float)(bVar22 * uVar887 |
                               (uint)!bVar22 *
                               ((uint)bVar21 * auVar683._20_4_ | (uint)!bVar21 * auVar680._20_4_));
            outptr[6] = (float)(bVar24 * uVar888 |
                               (uint)!bVar24 *
                               ((uint)bVar23 * auVar683._24_4_ | (uint)!bVar23 * auVar680._24_4_));
            outptr[7] = (float)(bVar25 * uVar889 |
                               (uint)!bVar25 *
                               ((uint)(bVar29 >> 7) * auVar683._28_4_ |
                               (uint)!(bool)(bVar29 >> 7) * auVar680._28_4_));
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = outptr + 8;
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)(uVar425 | 3) < (int)uVar427) {
          auVar953._8_4_ = 0x40490fdb;
          auVar953._0_8_ = 0x40490fdb40490fdb;
          auVar953._12_4_ = 0x40490fdb;
          auVar1223._8_4_ = 0x80000000;
          auVar1223._0_8_ = 0x8000000080000000;
          auVar1223._12_4_ = 0x80000000;
          auVar461 = vpternlogd_avx512vl(auVar1223,auVar893,auVar953,0xea);
          auVar1035._8_4_ = 0x3f800000;
          auVar1035._0_8_ = 0x3f8000003f800000;
          auVar1035._12_4_ = 0x3f800000;
          auVar460 = vdivps_avx(auVar1035,auVar893);
          auVar472 = ZEXT816(0) << 0x40;
          uVar46 = vcmpps_avx512vl(auVar472,auVar461,2);
          uVar47 = vcmpps_avx512vl(auVar893,auVar472,1);
          auVar1224._8_4_ = 0x80000000;
          auVar1224._0_8_ = 0x8000000080000000;
          auVar1224._12_4_ = 0x80000000;
          auVar1289._8_4_ = 0x40490fdb;
          auVar1289._0_8_ = 0x40490fdb40490fdb;
          auVar1289._12_4_ = 0x40490fdb;
          auVar1350._8_4_ = 0x7fffffff;
          auVar1350._0_8_ = 0x7fffffff7fffffff;
          auVar1350._12_4_ = 0x7fffffff;
          auVar1406._8_4_ = 0xbc83a25c;
          auVar1406._0_8_ = 0xbc83a25cbc83a25c;
          auVar1406._12_4_ = 0xbc83a25c;
          auVar1460._8_4_ = 0xbd99b01e;
          auVar1460._0_8_ = 0xbd99b01ebd99b01e;
          auVar1460._12_4_ = 0xbd99b01e;
          auVar1514._8_4_ = 0xbe117200;
          auVar1514._0_8_ = 0xbe117200be117200;
          auVar1514._12_4_ = 0xbe117200;
          auVar1568._8_4_ = 0xbeaaaa53;
          auVar1568._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1568._12_4_ = 0xbeaaaa53;
          auVar1622._8_4_ = 0x3b3ac537;
          auVar1622._0_8_ = 0x3b3ac5373b3ac537;
          auVar1622._12_4_ = 0x3b3ac537;
          auVar1676._8_4_ = 0x3d2edd4e;
          auVar1676._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1676._12_4_ = 0x3d2edd4e;
          auVar1730._8_4_ = 0x3dd9ed24;
          auVar1730._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1730._12_4_ = 0x3dd9ed24;
          auVar1781._8_4_ = 0x3e4cb974;
          auVar1781._0_8_ = 0x3e4cb9743e4cb974;
          auVar1781._12_4_ = 0x3e4cb974;
          auVar461 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          auVar519 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          uVar882 = uVar425;
          do {
            auVar464 = *(undefined1 (*) [16])*(undefined1 (*) [64])ptr;
            auVar465 = vmulps_avx512vl(auVar464,auVar460);
            uVar430 = vcmpps_avx512vl(auVar464,auVar472,1);
            auVar466 = vandps_avx512vl(auVar465,auVar1350);
            auVar61._8_4_ = 0xc0490fdb;
            auVar61._0_8_ = 0xc0490fdbc0490fdb;
            auVar61._12_4_ = 0xc0490fdb;
            auVar469 = vblendmps_avx512vl(auVar1289,auVar61);
            bVar12 = (bool)((byte)uVar430 & 1);
            auVar479._0_4_ = (uint)bVar12 * auVar469._0_4_ | (uint)!bVar12 * in_ZMM21._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar479._4_4_ = (uint)bVar12 * auVar469._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar479._8_4_ = (uint)bVar12 * auVar469._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar479._12_4_ = (uint)bVar12 * auVar469._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
            in_ZMM21 = ZEXT1664(auVar479);
            uVar430 = vcmpps_avx512vl(auVar1035,auVar466,1);
            auVar62._8_4_ = 0xbf800000;
            auVar62._0_8_ = 0xbf800000bf800000;
            auVar62._12_4_ = 0xbf800000;
            auVar469 = vblendmps_avx512vl(auVar466,auVar62);
            bVar29 = (byte)uVar430;
            auVar480._0_4_ =
                 (uint)(bVar29 & 1) * auVar469._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM22._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar480._4_4_ = (uint)bVar12 * auVar469._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar480._8_4_ = (uint)bVar12 * auVar469._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar480._12_4_ = (uint)bVar12 * auVar469._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
            uVar429 = vcmpps_avx512vl(auVar464,auVar472,4);
            auVar466 = vdivps_avx512vl(auVar480,auVar466);
            auVar481._0_4_ =
                 (uint)(bVar29 & 1) * auVar466._0_4_ | !(bool)(bVar29 & 1) * auVar480._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar481._4_4_ = (uint)bVar12 * auVar466._4_4_ | !bVar12 * auVar480._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar481._8_4_ = (uint)bVar12 * auVar466._8_4_ | !bVar12 * auVar480._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar481._12_4_ = (uint)bVar12 * auVar466._12_4_ | !bVar12 * auVar480._12_4_;
            in_ZMM22 = ZEXT1664(auVar481);
            auVar466 = vmulps_avx512vl(auVar481,auVar481);
            auVar464 = vandps_avx512vl(auVar464,auVar1224);
            auVar469 = vmulps_avx512vl(auVar466,auVar466);
            auVar470 = vfmadd213ps_avx512vl(auVar1406,auVar469,auVar1460);
            auVar470 = vfmadd213ps_avx512vl(auVar470,auVar469,auVar1514);
            auVar523 = vfmadd213ps_avx512vl(auVar1622,auVar469,auVar1676);
            auVar523 = vfmadd213ps_avx512vl(auVar523,auVar469,auVar1730);
            auVar470 = vfmadd213ps_avx512vl(auVar470,auVar469,auVar1568);
            auVar523 = vfmadd213ps_avx512vl(auVar523,auVar469,auVar1781);
            auVar469 = vfmadd213ps_avx512vl(auVar523,auVar469,auVar1035);
            auVar466 = vfmadd231ps_avx512vl(auVar469,auVar466,auVar470);
            uVar431 = vcmpps_avx512vl(auVar893,auVar472,4);
            uVar431 = uVar429 & uVar431;
            auVar466 = vmulps_avx512vl(auVar466,auVar481);
            auVar469 = vaddps_avx512vl(auVar466,auVar461);
            auVar482._0_4_ =
                 (uint)(bVar29 & 1) * auVar469._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar466._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar482._4_4_ = (uint)bVar12 * auVar469._4_4_ | (uint)!bVar12 * auVar466._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar482._8_4_ = (uint)bVar12 * auVar469._8_4_ | (uint)!bVar12 * auVar466._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar482._12_4_ = (uint)bVar12 * auVar469._12_4_ | (uint)!bVar12 * auVar466._12_4_;
            auVar465 = vpternlogd_avx512vl(auVar482,auVar465,auVar1224,0xf8);
            auVar466 = vaddps_avx512vl(auVar465,auVar479);
            bVar12 = (bool)((byte)uVar47 & 1);
            bVar15 = (bool)((byte)(uVar47 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar47 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar464 = vorps_avx512vl(auVar464,auVar519);
            auVar483._4_4_ = (uint)((byte)(uVar429 >> 1) & 1) * auVar464._4_4_;
            auVar483._0_4_ = (uint)((byte)uVar429 & 1) * auVar464._0_4_;
            auVar483._8_4_ = (uint)((byte)(uVar429 >> 2) & 1) * auVar464._8_4_;
            auVar483._12_4_ = (uint)((byte)(uVar429 >> 3) & 1) * auVar464._12_4_;
            uVar48 = (ushort)uVar429 | (ushort)uVar46;
            auVar464 = vorps_avx512vl(auVar483,auVar953);
            auVar469 = vmovdqa32_avx512vl(auVar483);
            bVar13 = (bool)((byte)uVar48 & 1);
            bVar16 = (bool)((byte)(uVar48 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar48 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar48 >> 3) & 1);
            bVar14 = (bool)((byte)uVar431 & 1);
            bVar17 = (bool)((byte)(uVar431 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar431 >> 2) & 1);
            bVar23 = (bool)((byte)(uVar431 >> 3) & 1);
            *outptr = (float)((uint)bVar14 *
                              ((uint)bVar12 * auVar466._0_4_ | (uint)!bVar12 * auVar465._0_4_) |
                             (uint)!bVar14 *
                             ((uint)bVar13 * auVar469._0_4_ | (uint)!bVar13 * auVar464._0_4_));
            outptr[1] = (float)((uint)bVar17 *
                                ((uint)bVar15 * auVar466._4_4_ | (uint)!bVar15 * auVar465._4_4_) |
                               (uint)!bVar17 *
                               ((uint)bVar16 * auVar469._4_4_ | (uint)!bVar16 * auVar464._4_4_));
            outptr[2] = (float)((uint)bVar20 *
                                ((uint)bVar18 * auVar466._8_4_ | (uint)!bVar18 * auVar465._8_4_) |
                               (uint)!bVar20 *
                               ((uint)bVar19 * auVar469._8_4_ | (uint)!bVar19 * auVar464._8_4_));
            outptr[3] = (float)((uint)bVar23 *
                                ((uint)bVar21 * auVar466._12_4_ | (uint)!bVar21 * auVar465._12_4_) |
                               (uint)!bVar23 *
                               ((uint)bVar22 * auVar469._12_4_ | (uint)!bVar22 * auVar464._12_4_));
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
            outptr = outptr + 4;
            uVar425 = uVar882 + 4;
            iVar424 = uVar882 + 7;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        auVar442 = vmovdqa64_avx512vl(auVar442);
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          return;
        }
        lVar428 = 0;
        do {
          local_98 = auVar442._0_4_;
          fVar890 = atan2f(*(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4),local_98);
          outptr[lVar428] = fVar890;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (aw == 1) {
        fVar890 = *ptr;
        if (iVar424 == 4) {
          auVar908 = *(undefined1 (*) [16])ptr;
        }
        else {
          auVar908._4_4_ = fVar890;
          auVar908._0_4_ = fVar890;
          auVar908._8_4_ = fVar890;
          auVar908._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar1027 = *(undefined1 (*) [32])ptr;
        }
        else {
          auVar1027._16_16_ = auVar908;
          auVar1027._0_16_ = auVar908;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar1027),auVar1027,1);
        }
        auVar710 = auVar734._0_32_;
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          auVar730 = ZEXT864(0);
          uVar47 = vcmpps_avx512f(auVar734,auVar730,1);
          auVar716 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0xc0490fdb));
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar878._0_4_ = (uint)bVar12 * auVar717._0_4_ | (uint)!bVar12 * auVar716._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar878._4_4_ = (uint)bVar12 * auVar717._4_4_ | (uint)!bVar12 * auVar716._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar878._8_4_ = (uint)bVar12 * auVar717._8_4_ | (uint)!bVar12 * auVar716._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar878._12_4_ = (uint)bVar12 * auVar717._12_4_ | (uint)!bVar12 * auVar716._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar878._16_4_ = (uint)bVar12 * auVar717._16_4_ | (uint)!bVar12 * auVar716._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar878._20_4_ = (uint)bVar12 * auVar717._20_4_ | (uint)!bVar12 * auVar716._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar878._24_4_ = (uint)bVar12 * auVar717._24_4_ | (uint)!bVar12 * auVar716._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar878._28_4_ = (uint)bVar12 * auVar717._28_4_ | (uint)!bVar12 * auVar716._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar878._32_4_ = (uint)bVar12 * auVar717._32_4_ | (uint)!bVar12 * auVar716._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar878._36_4_ = (uint)bVar12 * auVar717._36_4_ | (uint)!bVar12 * auVar716._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar878._40_4_ = (uint)bVar12 * auVar717._40_4_ | (uint)!bVar12 * auVar716._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar878._44_4_ = (uint)bVar12 * auVar717._44_4_ | (uint)!bVar12 * auVar716._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar878._48_4_ = (uint)bVar12 * auVar717._48_4_ | (uint)!bVar12 * auVar716._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar878._52_4_ = (uint)bVar12 * auVar717._52_4_ | (uint)!bVar12 * auVar716._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar878._56_4_ = (uint)bVar12 * auVar717._56_4_ | (uint)!bVar12 * auVar716._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar878._60_4_ = (uint)bVar12 * auVar717._60_4_ | (uint)!bVar12 * auVar716._60_4_;
          auVar716 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar1774._8_4_ = 0x80000000;
          auVar1774._0_8_ = 0x8000000080000000;
          auVar1774._12_4_ = 0x80000000;
          auVar1774._16_4_ = 0x80000000;
          auVar1774._20_4_ = 0x80000000;
          auVar1774._24_4_ = 0x80000000;
          auVar1774._28_4_ = 0x80000000;
          auVar1774._32_4_ = 0x80000000;
          auVar1774._36_4_ = 0x80000000;
          auVar1774._40_4_ = 0x80000000;
          auVar1774._44_4_ = 0x80000000;
          auVar1774._48_4_ = 0x80000000;
          auVar1774._52_4_ = 0x80000000;
          auVar1774._56_4_ = 0x80000000;
          auVar1774._60_4_ = 0x80000000;
          auVar716 = vpternlogd_avx512f(auVar716,auVar734,auVar1774,0xf8);
          iVar424 = 0xf;
          auVar717 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar718 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar725 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar726 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar727 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar728 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          uVar47 = vcmpps_avx512f(auVar734,auVar730,4);
          auVar729 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          do {
            auVar1774 = *(undefined1 (*) [64])ptr1;
            auVar737 = vdivps_avx512f(auVar734,auVar1774);
            auVar852 = vandps_avx512dq(auVar737,auVar718);
            uVar430 = vcmpps_avx512f(auVar719,auVar852,1);
            auVar342._8_4_ = 0xbf800000;
            auVar342._0_8_ = 0xbf800000bf800000;
            auVar342._12_4_ = 0xbf800000;
            auVar342._16_4_ = 0xbf800000;
            auVar342._20_4_ = 0xbf800000;
            auVar342._24_4_ = 0xbf800000;
            auVar342._28_4_ = 0xbf800000;
            auVar342._32_4_ = 0xbf800000;
            auVar342._36_4_ = 0xbf800000;
            auVar342._40_4_ = 0xbf800000;
            auVar342._44_4_ = 0xbf800000;
            auVar342._48_4_ = 0xbf800000;
            auVar342._52_4_ = 0xbf800000;
            auVar342._56_4_ = 0xbf800000;
            auVar342._60_4_ = 0xbf800000;
            auVar733 = vblendmps_avx512f(auVar852,auVar342);
            bVar12 = (bool)((byte)uVar430 & 1);
            auVar879._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * in_ZMM22._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar879._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar879._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar879._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar879._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * in_ZMM22._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar879._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * in_ZMM22._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar879._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * in_ZMM22._24_4_;
            bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
            auVar879._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * in_ZMM22._28_4_;
            bVar29 = (byte)(uVar430 >> 8);
            bVar12 = (bool)(bVar29 & 1);
            auVar879._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * in_ZMM22._32_4_;
            bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
            auVar879._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * in_ZMM22._36_4_;
            bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
            auVar879._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * in_ZMM22._40_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
            auVar879._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * in_ZMM22._44_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
            auVar879._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * in_ZMM22._48_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
            auVar879._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * in_ZMM22._52_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
            auVar879._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * in_ZMM22._56_4_;
            bVar12 = SUB81(uVar430 >> 0xf,0);
            auVar879._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * in_ZMM22._60_4_;
            auVar852 = vmaxps_avx512f(auVar852,auVar719);
            auVar852 = vdivps_avx512f(auVar879,auVar852);
            in_ZMM22 = vmulps_avx512f(auVar852,auVar852);
            uVar429 = vcmpps_avx512f(auVar1774,auVar730,4);
            auVar733 = vmulps_avx512f(in_ZMM22,in_ZMM22);
            auVar736 = vfmadd213ps_avx512f(auVar720,auVar733,auVar721);
            auVar736 = vfmadd213ps_avx512f(auVar736,auVar733,auVar722);
            auVar731 = vfmadd213ps_avx512f(auVar724,auVar733,auVar725);
            auVar731 = vfmadd213ps_avx512f(auVar731,auVar733,auVar726);
            auVar736 = vfmadd213ps_avx512f(auVar736,auVar733,auVar723);
            auVar731 = vfmadd213ps_avx512f(auVar731,auVar733,auVar727);
            auVar733 = vfmadd213ps_avx512f(auVar731,auVar733,auVar719);
            auVar733 = vfmadd231ps_avx512f(auVar733,in_ZMM22,auVar736);
            uVar431 = vcmpps_avx512f(auVar1774,auVar730,1);
            auVar852 = vmulps_avx512f(auVar733,auVar852);
            auVar733 = vaddps_avx512f(auVar852,auVar728);
            bVar12 = (bool)((byte)uVar430 & 1);
            auVar880._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar852._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar880._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar852._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar880._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar852._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar880._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar852._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar880._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar852._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar880._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar852._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar880._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar852._24_4_;
            bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
            auVar880._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar852._28_4_;
            bVar12 = (bool)(bVar29 & 1);
            auVar880._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar852._32_4_;
            bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
            auVar880._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar852._36_4_;
            bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
            auVar880._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar852._40_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
            auVar880._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar852._44_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
            auVar880._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar852._48_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
            auVar880._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar852._52_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
            auVar880._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar852._56_4_;
            bVar12 = SUB81(uVar430 >> 0xf,0);
            auVar880._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar852._60_4_;
            auVar1774 = vpternlogd_avx512f(auVar1774,auVar717,auVar729,0xea);
            auVar852 = vpternlogd_avx512f(auVar880,auVar737,auVar717,0xf8);
            uVar430 = vcmpps_avx512f(auVar1774,auVar730,1);
            auVar1774 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar733 = vaddps_avx512f(auVar852,auVar878);
            bVar12 = (bool)((byte)uVar431 & 1);
            in_ZMM21._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar852._0_4_;
            bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
            in_ZMM21._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar852._4_4_;
            bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
            in_ZMM21._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar852._8_4_;
            bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
            in_ZMM21._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar852._12_4_;
            bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
            in_ZMM21._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar852._16_4_;
            bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
            in_ZMM21._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar852._20_4_;
            bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
            in_ZMM21._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar852._24_4_;
            bVar12 = (bool)((byte)(uVar431 >> 7) & 1);
            in_ZMM21._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar852._28_4_;
            bVar12 = (bool)((byte)(uVar431 >> 8) & 1);
            in_ZMM21._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar852._32_4_;
            bVar12 = (bool)((byte)(uVar431 >> 9) & 1);
            in_ZMM21._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar852._36_4_;
            bVar12 = (bool)((byte)(uVar431 >> 10) & 1);
            in_ZMM21._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar852._40_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xb) & 1);
            in_ZMM21._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar852._44_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xc) & 1);
            in_ZMM21._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar852._48_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xd) & 1);
            in_ZMM21._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar852._52_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xe) & 1);
            in_ZMM21._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar852._56_4_;
            bVar12 = SUB81(uVar431 >> 0xf,0);
            in_ZMM21._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar852._60_4_;
            auVar852 = vblendmps_avx512f(auVar716,in_ZMM21);
            bVar12 = (bool)((byte)uVar429 & 1);
            bVar14 = (bool)((byte)(uVar429 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar429 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar429 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar429 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar429 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar429 >> 6) & 1);
            bVar20 = (bool)((byte)(uVar429 >> 7) & 1);
            bVar21 = (bool)((byte)(uVar429 >> 8) & 1);
            bVar22 = (bool)((byte)(uVar429 >> 9) & 1);
            bVar23 = (bool)((byte)(uVar429 >> 10) & 1);
            bVar24 = (bool)((byte)(uVar429 >> 0xb) & 1);
            bVar25 = (bool)((byte)(uVar429 >> 0xc) & 1);
            bVar26 = (bool)((byte)(uVar429 >> 0xd) & 1);
            bVar27 = (bool)((byte)(uVar429 >> 0xe) & 1);
            bVar28 = SUB81(uVar429 >> 0xf,0);
            bVar13 = (bool)((byte)uVar47 & 1);
            auVar710._0_4_ =
                 (uint)bVar13 * ((uint)bVar12 * auVar852._0_4_ | (uint)!bVar12 * auVar737._0_4_) |
                 (uint)!bVar13 * (uint)((byte)uVar430 & 1) * auVar1774._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar710._4_4_ =
                 (uint)bVar12 * ((uint)bVar14 * auVar852._4_4_ | (uint)!bVar14 * auVar737._4_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 1) & 1) * auVar1774._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar710._8_4_ =
                 (uint)bVar12 * ((uint)bVar15 * auVar852._8_4_ | (uint)!bVar15 * auVar737._8_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 2) & 1) * auVar1774._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar710._12_4_ =
                 (uint)bVar12 * ((uint)bVar16 * auVar852._12_4_ | (uint)!bVar16 * auVar737._12_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 3) & 1) * auVar1774._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar710._16_4_ =
                 (uint)bVar12 * ((uint)bVar17 * auVar852._16_4_ | (uint)!bVar17 * auVar737._16_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 4) & 1) * auVar1774._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar710._20_4_ =
                 (uint)bVar12 * ((uint)bVar18 * auVar852._20_4_ | (uint)!bVar18 * auVar737._20_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 5) & 1) * auVar1774._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar710._24_4_ =
                 (uint)bVar12 * ((uint)bVar19 * auVar852._24_4_ | (uint)!bVar19 * auVar737._24_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 6) & 1) * auVar1774._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar710._28_4_ =
                 (uint)bVar12 * ((uint)bVar20 * auVar852._28_4_ | (uint)!bVar20 * auVar737._28_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 7) & 1) * auVar1774._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            auVar881._32_4_ =
                 (uint)bVar12 * ((uint)bVar21 * auVar852._32_4_ | (uint)!bVar21 * auVar737._32_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 8) & 1) * auVar1774._32_4_;
            auVar881._0_32_ = auVar710;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar881._36_4_ =
                 (uint)bVar12 * ((uint)bVar22 * auVar852._36_4_ | (uint)!bVar22 * auVar737._36_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 9) & 1) * auVar1774._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar881._40_4_ =
                 (uint)bVar12 * ((uint)bVar23 * auVar852._40_4_ | (uint)!bVar23 * auVar737._40_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 10) & 1) * auVar1774._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar881._44_4_ =
                 (uint)bVar12 * ((uint)bVar24 * auVar852._44_4_ | (uint)!bVar24 * auVar737._44_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 0xb) & 1) * auVar1774._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar881._48_4_ =
                 (uint)bVar12 * ((uint)bVar25 * auVar852._48_4_ | (uint)!bVar25 * auVar737._48_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 0xc) & 1) * auVar1774._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar881._52_4_ =
                 (uint)bVar12 * ((uint)bVar26 * auVar852._52_4_ | (uint)!bVar26 * auVar737._52_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 0xd) & 1) * auVar1774._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar881._56_4_ =
                 (uint)bVar12 * ((uint)bVar27 * auVar852._56_4_ | (uint)!bVar27 * auVar737._56_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 0xe) & 1) * auVar1774._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar881._60_4_ =
                 (uint)bVar12 * ((uint)bVar28 * auVar852._60_4_ | (uint)!bVar28 * auVar737._60_4_) |
                 (uint)!bVar12 * (uint)(byte)(uVar430 >> 0xf) * auVar1774._60_4_;
            *(undefined1 (*) [64])outptr = auVar881;
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        if ((int)(uVar425 | 7) < (int)uVar427) {
          auVar442 = ZEXT816(0) << 0x40;
          auVar187._8_4_ = 0x80000000;
          auVar187._0_8_ = 0x8000000080000000;
          auVar187._12_4_ = 0x80000000;
          auVar187._16_4_ = 0x80000000;
          auVar187._20_4_ = 0x80000000;
          auVar187._24_4_ = 0x80000000;
          auVar187._28_4_ = 0x80000000;
          vandps_avx512vl(auVar1027,auVar187);
          uVar47 = vcmpps_avx512vl(auVar1027,ZEXT1632(auVar442),4);
          uVar430 = vcmpps_avx512vl(auVar1027,ZEXT1632(auVar442),1);
          auVar674 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
          bVar12 = (bool)((byte)uVar430 & 1);
          auVar711._0_4_ = (uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar711._4_4_ = (uint)bVar12 * auVar674._4_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar711._8_4_ = (uint)bVar12 * auVar674._8_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar711._12_4_ = (uint)bVar12 * auVar674._12_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar711._16_4_ = (uint)bVar12 * auVar674._16_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar711._20_4_ = (uint)bVar12 * auVar674._20_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar711._24_4_ = (uint)bVar12 * auVar674._24_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = SUB81(uVar430 >> 7,0);
          auVar711._28_4_ = (uint)bVar12 * auVar674._28_4_ | (uint)!bVar12 * 0x40490fdb;
          auVar188._8_4_ = 0x3fc90fdb;
          auVar188._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar188._12_4_ = 0x3fc90fdb;
          auVar188._16_4_ = 0x3fc90fdb;
          auVar188._20_4_ = 0x3fc90fdb;
          auVar188._24_4_ = 0x3fc90fdb;
          auVar188._28_4_ = 0x3fc90fdb;
          auVar674 = vorps_avx512vl(auVar710,auVar188);
          auVar712._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar674._4_4_;
          auVar712._0_4_ = (uint)((byte)uVar47 & 1) * auVar674._0_4_;
          auVar712._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar674._8_4_;
          auVar712._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar674._12_4_;
          auVar712._16_4_ = (uint)((byte)(uVar47 >> 4) & 1) * auVar674._16_4_;
          auVar712._20_4_ = (uint)((byte)(uVar47 >> 5) & 1) * auVar674._20_4_;
          auVar712._24_4_ = (uint)((byte)(uVar47 >> 6) & 1) * auVar674._24_4_;
          auVar712._28_4_ = (uint)(byte)(uVar47 >> 7) * auVar674._28_4_;
          auVar1276._8_4_ = 0x80000000;
          auVar1276._0_8_ = 0x8000000080000000;
          auVar1276._12_4_ = 0x80000000;
          auVar1276._16_4_ = 0x80000000;
          auVar1276._20_4_ = 0x80000000;
          auVar1276._24_4_ = 0x80000000;
          auVar1276._28_4_ = 0x80000000;
          auVar1342._8_4_ = 0x7fffffff;
          auVar1342._0_8_ = 0x7fffffff7fffffff;
          auVar1342._12_4_ = 0x7fffffff;
          auVar1342._16_4_ = 0x7fffffff;
          auVar1342._20_4_ = 0x7fffffff;
          auVar1342._24_4_ = 0x7fffffff;
          auVar1342._28_4_ = 0x7fffffff;
          auVar1398._8_4_ = 0x3f800000;
          auVar1398._0_8_ = 0x3f8000003f800000;
          auVar1398._12_4_ = 0x3f800000;
          auVar1398._16_4_ = 0x3f800000;
          auVar1398._20_4_ = 0x3f800000;
          auVar1398._24_4_ = 0x3f800000;
          auVar1398._28_4_ = 0x3f800000;
          auVar1453._8_4_ = 0xbc83a25c;
          auVar1453._0_8_ = 0xbc83a25cbc83a25c;
          auVar1453._12_4_ = 0xbc83a25c;
          auVar1453._16_4_ = 0xbc83a25c;
          auVar1453._20_4_ = 0xbc83a25c;
          auVar1453._24_4_ = 0xbc83a25c;
          auVar1453._28_4_ = 0xbc83a25c;
          auVar1507._8_4_ = 0xbd99b01e;
          auVar1507._0_8_ = 0xbd99b01ebd99b01e;
          auVar1507._12_4_ = 0xbd99b01e;
          auVar1507._16_4_ = 0xbd99b01e;
          auVar1507._20_4_ = 0xbd99b01e;
          auVar1507._24_4_ = 0xbd99b01e;
          auVar1507._28_4_ = 0xbd99b01e;
          auVar1561._8_4_ = 0xbe117200;
          auVar1561._0_8_ = 0xbe117200be117200;
          auVar1561._12_4_ = 0xbe117200;
          auVar1561._16_4_ = 0xbe117200;
          auVar1561._20_4_ = 0xbe117200;
          auVar1561._24_4_ = 0xbe117200;
          auVar1561._28_4_ = 0xbe117200;
          auVar1615._8_4_ = 0xbeaaaa53;
          auVar1615._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1615._12_4_ = 0xbeaaaa53;
          auVar1615._16_4_ = 0xbeaaaa53;
          auVar1615._20_4_ = 0xbeaaaa53;
          auVar1615._24_4_ = 0xbeaaaa53;
          auVar1615._28_4_ = 0xbeaaaa53;
          auVar1669._8_4_ = 0x3b3ac537;
          auVar1669._0_8_ = 0x3b3ac5373b3ac537;
          auVar1669._12_4_ = 0x3b3ac537;
          auVar1669._16_4_ = 0x3b3ac537;
          auVar1669._20_4_ = 0x3b3ac537;
          auVar1669._24_4_ = 0x3b3ac537;
          auVar1669._28_4_ = 0x3b3ac537;
          auVar1723._8_4_ = 0x3d2edd4e;
          auVar1723._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1723._12_4_ = 0x3d2edd4e;
          auVar1723._16_4_ = 0x3d2edd4e;
          auVar1723._20_4_ = 0x3d2edd4e;
          auVar1723._24_4_ = 0x3d2edd4e;
          auVar1723._28_4_ = 0x3d2edd4e;
          auVar1773._8_4_ = 0x3dd9ed24;
          auVar1773._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1773._12_4_ = 0x3dd9ed24;
          auVar1773._16_4_ = 0x3dd9ed24;
          auVar1773._20_4_ = 0x3dd9ed24;
          auVar1773._24_4_ = 0x3dd9ed24;
          auVar1773._28_4_ = 0x3dd9ed24;
          auVar1821._8_4_ = 0x3e4cb974;
          auVar1821._0_8_ = 0x3e4cb9743e4cb974;
          auVar1821._12_4_ = 0x3e4cb974;
          auVar1821._16_4_ = 0x3e4cb974;
          auVar1821._20_4_ = 0x3e4cb974;
          auVar1821._24_4_ = 0x3e4cb974;
          auVar1821._28_4_ = 0x3e4cb974;
          auVar674 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          auVar677 = vbroadcastss_avx512vl(ZEXT416(0x40490fdb));
          auVar678 = vorps_avx512vl(auVar712,auVar677);
          uVar882 = uVar425;
          do {
            auVar562 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr1;
            auVar679 = vdivps_avx512vl(auVar1027,auVar562);
            vandps_avx512vl(auVar679,auVar1342);
            uVar430 = vcmpps_avx512vl(auVar1398,auVar679,1);
            auVar189._8_4_ = 0xbf800000;
            auVar189._0_8_ = 0xbf800000bf800000;
            auVar189._12_4_ = 0xbf800000;
            auVar189._16_4_ = 0xbf800000;
            auVar189._20_4_ = 0xbf800000;
            auVar189._24_4_ = 0xbf800000;
            auVar189._28_4_ = 0xbf800000;
            auVar680 = vblendmps_avx512vl(auVar679,auVar189);
            bVar29 = (byte)uVar430;
            auVar713._0_4_ =
                 (uint)(bVar29 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM22._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar713._4_4_ = (uint)bVar12 * auVar680._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar713._8_4_ = (uint)bVar12 * auVar680._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar713._12_4_ = (uint)bVar12 * auVar680._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar713._16_4_ = (uint)bVar12 * auVar680._16_4_ | (uint)!bVar12 * in_ZMM22._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar713._20_4_ = (uint)bVar12 * auVar680._20_4_ | (uint)!bVar12 * in_ZMM22._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar713._24_4_ = (uint)bVar12 * auVar680._24_4_ | (uint)!bVar12 * in_ZMM22._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar713._28_4_ = (uint)bVar12 * auVar680._28_4_ | (uint)!bVar12 * in_ZMM22._28_4_;
            auVar680 = vdivps_avx512vl(auVar713,auVar679);
            auVar714._0_4_ =
                 (uint)(bVar29 & 1) * auVar680._0_4_ | !(bool)(bVar29 & 1) * auVar713._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar714._4_4_ = (uint)bVar12 * auVar680._4_4_ | !bVar12 * auVar713._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar714._8_4_ = (uint)bVar12 * auVar680._8_4_ | !bVar12 * auVar713._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar714._12_4_ = (uint)bVar12 * auVar680._12_4_ | !bVar12 * auVar713._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar714._16_4_ = (uint)bVar12 * auVar680._16_4_ | !bVar12 * auVar713._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar714._20_4_ = (uint)bVar12 * auVar680._20_4_ | !bVar12 * auVar713._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar714._24_4_ = (uint)bVar12 * auVar680._24_4_ | !bVar12 * auVar713._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar714._28_4_ = (uint)bVar12 * auVar680._28_4_ | !bVar12 * auVar713._28_4_;
            in_ZMM22 = ZEXT3264(auVar714);
            auVar680 = vmulps_avx512vl(auVar714,auVar714);
            auVar683 = vmulps_avx512vl(auVar680,auVar680);
            auVar701 = ZEXT1632(auVar442);
            uVar429 = vcmpps_avx512vl(auVar562,auVar701,4);
            uVar429 = uVar47 & uVar429;
            auVar684 = vfmadd213ps_avx512vl(auVar1453,auVar683,auVar1507);
            auVar684 = vfmadd213ps_avx512vl(auVar684,auVar683,auVar1561);
            auVar685 = vfmadd213ps_avx512vl(auVar1669,auVar683,auVar1723);
            auVar685 = vfmadd213ps_avx512vl(auVar685,auVar683,auVar1773);
            auVar685 = vfmadd213ps_avx512vl(auVar685,auVar683,auVar1821);
            auVar684 = vfmadd213ps_avx512vl(auVar684,auVar683,auVar1615);
            auVar683 = vfmadd213ps_avx512vl(auVar685,auVar683,auVar1398);
            auVar680 = vfmadd231ps_avx512vl(auVar683,auVar680,auVar684);
            auVar680 = vmulps_avx512vl(auVar680,auVar714);
            uVar431 = vcmpps_avx512vl(auVar562,auVar701,1);
            auVar683 = vaddps_avx512vl(auVar680,auVar674);
            auVar715._0_4_ =
                 (uint)(bVar29 & 1) * auVar683._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar680._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar715._4_4_ = (uint)bVar12 * auVar683._4_4_ | (uint)!bVar12 * auVar680._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar715._8_4_ = (uint)bVar12 * auVar683._8_4_ | (uint)!bVar12 * auVar680._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar715._12_4_ = (uint)bVar12 * auVar683._12_4_ | (uint)!bVar12 * auVar680._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar715._16_4_ = (uint)bVar12 * auVar683._16_4_ | (uint)!bVar12 * auVar680._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar715._20_4_ = (uint)bVar12 * auVar683._20_4_ | (uint)!bVar12 * auVar680._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar715._24_4_ = (uint)bVar12 * auVar683._24_4_ | (uint)!bVar12 * auVar680._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar715._28_4_ = (uint)bVar12 * auVar683._28_4_ | (uint)!bVar12 * auVar680._28_4_;
            auVar679 = vpternlogd_avx512vl(auVar715,auVar679,auVar1276,0xf8);
            auVar562 = vpternlogd_avx512vl(auVar562,auVar677,auVar1276,0xec);
            auVar680 = vaddps_avx512vl(auVar679,auVar711);
            bVar12 = (bool)((byte)uVar431 & 1);
            uVar425 = (uint)bVar12 * auVar680._0_4_ | (uint)!bVar12 * auVar679._0_4_;
            bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
            uVar883 = (uint)bVar12 * auVar680._4_4_ | (uint)!bVar12 * auVar679._4_4_;
            bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
            uVar884 = (uint)bVar12 * auVar680._8_4_ | (uint)!bVar12 * auVar679._8_4_;
            bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
            uVar885 = (uint)bVar12 * auVar680._12_4_ | (uint)!bVar12 * auVar679._12_4_;
            bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
            uVar886 = (uint)bVar12 * auVar680._16_4_ | (uint)!bVar12 * auVar679._16_4_;
            bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
            uVar887 = (uint)bVar12 * auVar680._20_4_ | (uint)!bVar12 * auVar679._20_4_;
            bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
            uVar888 = (uint)bVar12 * auVar680._24_4_ | (uint)!bVar12 * auVar679._24_4_;
            bVar12 = SUB81(uVar431 >> 7,0);
            uVar889 = (uint)bVar12 * auVar680._28_4_ | (uint)!bVar12 * auVar679._28_4_;
            in_ZMM21 = ZEXT3264(CONCAT428(uVar889,CONCAT424(uVar888,CONCAT420(uVar887,CONCAT416(
                                                  uVar886,CONCAT412(uVar885,CONCAT48(uVar884,
                                                  CONCAT44(uVar883,uVar425))))))));
            uVar46 = vcmpps_avx512vl(auVar701,auVar562,2);
            bVar29 = (byte)uVar47 | (byte)uVar46;
            auVar679 = vpblendmd_avx512vl(auVar678,auVar712);
            bVar13 = (bool)(bVar29 >> 1 & 1);
            bVar15 = (bool)(bVar29 >> 2 & 1);
            bVar17 = (bool)(bVar29 >> 3 & 1);
            bVar19 = (bool)(bVar29 >> 4 & 1);
            bVar21 = (bool)(bVar29 >> 5 & 1);
            bVar23 = (bool)(bVar29 >> 6 & 1);
            bVar12 = (bool)((byte)uVar429 & 1);
            bVar14 = (bool)((byte)(uVar429 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar429 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar429 >> 3) & 1);
            bVar20 = (bool)((byte)(uVar429 >> 4) & 1);
            bVar22 = (bool)((byte)(uVar429 >> 5) & 1);
            bVar24 = (bool)((byte)(uVar429 >> 6) & 1);
            bVar25 = SUB81(uVar429 >> 7,0);
            *(uint *)*(undefined1 (*) [64])outptr =
                 bVar12 * uVar425 |
                 (uint)!bVar12 *
                 ((uint)(bVar29 & 1) * auVar679._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar562._0_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
                 bVar14 * uVar883 |
                 (uint)!bVar14 * ((uint)bVar13 * auVar679._4_4_ | (uint)!bVar13 * auVar562._4_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
                 bVar16 * uVar884 |
                 (uint)!bVar16 * ((uint)bVar15 * auVar679._8_4_ | (uint)!bVar15 * auVar562._8_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
                 bVar18 * uVar885 |
                 (uint)!bVar18 * ((uint)bVar17 * auVar679._12_4_ | (uint)!bVar17 * auVar562._12_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x10) =
                 bVar20 * uVar886 |
                 (uint)!bVar20 * ((uint)bVar19 * auVar679._16_4_ | (uint)!bVar19 * auVar562._16_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x14) =
                 bVar22 * uVar887 |
                 (uint)!bVar22 * ((uint)bVar21 * auVar679._20_4_ | (uint)!bVar21 * auVar562._20_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x18) =
                 bVar24 * uVar888 |
                 (uint)!bVar24 * ((uint)bVar23 * auVar679._24_4_ | (uint)!bVar23 * auVar562._24_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x1c) =
                 bVar25 * uVar889 |
                 (uint)!bVar25 *
                 ((uint)(bVar29 >> 7) * auVar679._28_4_ |
                 (uint)!(bool)(bVar29 >> 7) * auVar562._28_4_);
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)(uVar425 | 3) < (int)uVar427) {
          auVar461 = ZEXT816(0) << 0x20;
          auVar63._8_4_ = 0x80000000;
          auVar63._0_8_ = 0x8000000080000000;
          auVar63._12_4_ = 0x80000000;
          auVar442 = vandps_avx512vl(auVar908,auVar63);
          uVar47 = vcmpps_avx512vl(auVar908,auVar461,4);
          uVar430 = vcmpps_avx512vl(auVar908,auVar461,1);
          auVar460 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
          bVar12 = (bool)((byte)uVar430 & 1);
          auVar532._0_4_ = (uint)bVar12 * auVar460._0_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar532._4_4_ = (uint)bVar12 * auVar460._4_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar532._8_4_ = (uint)bVar12 * auVar460._8_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar532._12_4_ = (uint)bVar12 * auVar460._12_4_ | (uint)!bVar12 * 0x40490fdb;
          auVar64._8_4_ = 0x3fc90fdb;
          auVar64._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar64._12_4_ = 0x3fc90fdb;
          auVar442 = vorps_avx512vl(auVar442,auVar64);
          auVar533._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar442._4_4_;
          auVar533._0_4_ = (uint)((byte)uVar47 & 1) * auVar442._0_4_;
          auVar533._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar442._8_4_;
          auVar533._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar442._12_4_;
          auVar1185._8_4_ = 0x80000000;
          auVar1185._0_8_ = 0x8000000080000000;
          auVar1185._12_4_ = 0x80000000;
          auVar1237._8_4_ = 0x7fffffff;
          auVar1237._0_8_ = 0x7fffffff7fffffff;
          auVar1237._12_4_ = 0x7fffffff;
          auVar1303._8_4_ = 0x3f800000;
          auVar1303._0_8_ = 0x3f8000003f800000;
          auVar1303._12_4_ = 0x3f800000;
          auVar1362._8_4_ = 0xbc83a25c;
          auVar1362._0_8_ = 0xbc83a25cbc83a25c;
          auVar1362._12_4_ = 0xbc83a25c;
          auVar1418._8_4_ = 0xbd99b01e;
          auVar1418._0_8_ = 0xbd99b01ebd99b01e;
          auVar1418._12_4_ = 0xbd99b01e;
          auVar1472._8_4_ = 0xbe117200;
          auVar1472._0_8_ = 0xbe117200be117200;
          auVar1472._12_4_ = 0xbe117200;
          auVar1526._8_4_ = 0xbeaaaa53;
          auVar1526._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1526._12_4_ = 0xbeaaaa53;
          auVar1580._8_4_ = 0x3b3ac537;
          auVar1580._0_8_ = 0x3b3ac5373b3ac537;
          auVar1580._12_4_ = 0x3b3ac537;
          auVar1634._8_4_ = 0x3d2edd4e;
          auVar1634._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1634._12_4_ = 0x3d2edd4e;
          auVar1688._8_4_ = 0x3dd9ed24;
          auVar1688._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1688._12_4_ = 0x3dd9ed24;
          auVar1742._8_4_ = 0x3e4cb974;
          auVar1742._0_8_ = 0x3e4cb9743e4cb974;
          auVar1742._12_4_ = 0x3e4cb974;
          auVar1792._8_4_ = 0x3fc90fdb;
          auVar1792._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1792._12_4_ = 0x3fc90fdb;
          auVar442 = vbroadcastss_avx512vl(ZEXT416(0x40490fdb));
          auVar460 = vorps_avx512vl(auVar533,auVar442);
          uVar882 = uVar425;
          do {
            auVar519 = *(undefined1 (*) [16])*(undefined1 (*) [64])ptr1;
            auVar472 = vdivps_avx512vl(auVar908,auVar519);
            auVar464 = vandps_avx512vl(auVar472,auVar1237);
            uVar430 = vcmpps_avx512vl(auVar1303,auVar464,1);
            auVar65._8_4_ = 0xbf800000;
            auVar65._0_8_ = 0xbf800000bf800000;
            auVar65._12_4_ = 0xbf800000;
            auVar465 = vblendmps_avx512vl(auVar464,auVar65);
            bVar29 = (byte)uVar430;
            auVar534._0_4_ =
                 (uint)(bVar29 & 1) * auVar465._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM21._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar534._4_4_ = (uint)bVar12 * auVar465._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar534._8_4_ = (uint)bVar12 * auVar465._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar534._12_4_ = (uint)bVar12 * auVar465._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
            auVar464 = vdivps_avx512vl(auVar534,auVar464);
            auVar535._0_4_ =
                 (uint)(bVar29 & 1) * auVar464._0_4_ | !(bool)(bVar29 & 1) * auVar534._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar535._4_4_ = (uint)bVar12 * auVar464._4_4_ | !bVar12 * auVar534._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar535._8_4_ = (uint)bVar12 * auVar464._8_4_ | !bVar12 * auVar534._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar535._12_4_ = (uint)bVar12 * auVar464._12_4_ | !bVar12 * auVar534._12_4_;
            in_ZMM21 = ZEXT1664(auVar535);
            auVar464 = vmulps_avx512vl(auVar535,auVar535);
            auVar465 = vmulps_avx512vl(auVar464,auVar464);
            uVar429 = vcmpps_avx512vl(auVar519,auVar461,4);
            uVar429 = uVar47 & uVar429;
            auVar466 = vfmadd213ps_avx512vl(auVar1362,auVar465,auVar1418);
            auVar466 = vfmadd213ps_avx512vl(auVar466,auVar465,auVar1472);
            auVar469 = vfmadd213ps_avx512vl(auVar1580,auVar465,auVar1634);
            auVar469 = vfmadd213ps_avx512vl(auVar469,auVar465,auVar1688);
            auVar469 = vfmadd213ps_avx512vl(auVar469,auVar465,auVar1742);
            auVar466 = vfmadd213ps_avx512vl(auVar466,auVar465,auVar1526);
            auVar465 = vfmadd213ps_avx512vl(auVar469,auVar465,auVar1303);
            auVar464 = vfmadd231ps_avx512vl(auVar465,auVar464,auVar466);
            auVar464 = vmulps_avx512vl(auVar464,auVar535);
            uVar431 = vcmpps_avx512vl(auVar519,auVar461,1);
            auVar465 = vaddps_avx512vl(auVar464,auVar1792);
            auVar536._0_4_ =
                 (uint)(bVar29 & 1) * auVar465._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar464._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar536._4_4_ = (uint)bVar12 * auVar465._4_4_ | (uint)!bVar12 * auVar464._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar536._8_4_ = (uint)bVar12 * auVar465._8_4_ | (uint)!bVar12 * auVar464._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar536._12_4_ = (uint)bVar12 * auVar465._12_4_ | (uint)!bVar12 * auVar464._12_4_;
            auVar472 = vpternlogd_avx512vl(auVar536,auVar472,auVar1185,0xf8);
            auVar519 = vpternlogd_avx512vl(auVar519,auVar442,auVar1185,0xec);
            auVar464 = vaddps_avx512vl(auVar472,auVar532);
            bVar12 = (bool)((byte)uVar431 & 1);
            bVar15 = (bool)((byte)(uVar431 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar431 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar431 >> 3) & 1);
            uVar46 = vcmpps_avx512vl(auVar461,auVar519,2);
            uVar48 = (ushort)uVar47 | (ushort)uVar46;
            auVar465 = vpblendmd_avx512vl(auVar460,auVar533);
            bVar13 = (bool)((byte)uVar48 & 1);
            bVar16 = (bool)((byte)(uVar48 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar48 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar48 >> 3) & 1);
            bVar14 = (bool)((byte)uVar429 & 1);
            bVar17 = (bool)((byte)(uVar429 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar429 >> 2) & 1);
            bVar23 = (bool)((byte)(uVar429 >> 3) & 1);
            *(uint *)*(undefined1 (*) [64])outptr =
                 (uint)bVar14 * ((uint)bVar12 * auVar464._0_4_ | (uint)!bVar12 * auVar472._0_4_) |
                 (uint)!bVar14 * ((uint)bVar13 * auVar465._0_4_ | (uint)!bVar13 * auVar519._0_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
                 (uint)bVar17 * ((uint)bVar15 * auVar464._4_4_ | (uint)!bVar15 * auVar472._4_4_) |
                 (uint)!bVar17 * ((uint)bVar16 * auVar465._4_4_ | (uint)!bVar16 * auVar519._4_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
                 (uint)bVar20 * ((uint)bVar18 * auVar464._8_4_ | (uint)!bVar18 * auVar472._8_4_) |
                 (uint)!bVar20 * ((uint)bVar19 * auVar465._8_4_ | (uint)!bVar19 * auVar519._8_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
                 (uint)bVar23 * ((uint)bVar21 * auVar464._12_4_ | (uint)!bVar21 * auVar472._12_4_) |
                 (uint)!bVar23 * ((uint)bVar22 * auVar465._12_4_ | (uint)!bVar22 * auVar519._12_4_);
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
            uVar425 = uVar882 + 4;
            iVar424 = uVar882 + 7;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          return;
        }
        lVar428 = 0;
        do {
          fVar891 = atan2f(fVar890,*(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4));
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = fVar891;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
    }
    if (bp != 1) {
      return;
    }
    if (aw == bw) {
      if (0 < (int)uVar425 && iVar424 == 0x10) {
        auVar716 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar1774 = ZEXT1264(ZEXT812(0));
        auVar717 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar718 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar719 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar720 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar721 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar722 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar723 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar724 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar725 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar726 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar727 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar728 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar729 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        auVar730 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        auVar734 = in_ZMM21;
        uVar427 = uVar425;
        do {
          auVar852 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          auVar737 = *(undefined1 (*) [64])ptr;
          auVar442 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar852._0_16_);
          auVar733 = vbroadcastss_avx512f(auVar442);
          in_ZMM19 = vmulps_avx512f(auVar737,auVar733);
          uVar47 = vcmpps_avx512f(auVar737,auVar1774,1);
          auVar733 = vandps_avx512dq(in_ZMM19,auVar718);
          auVar343._8_4_ = 0xc0490fdb;
          auVar343._0_8_ = 0xc0490fdbc0490fdb;
          auVar343._12_4_ = 0xc0490fdb;
          auVar343._16_4_ = 0xc0490fdb;
          auVar343._20_4_ = 0xc0490fdb;
          auVar343._24_4_ = 0xc0490fdb;
          auVar343._28_4_ = 0xc0490fdb;
          auVar343._32_4_ = 0xc0490fdb;
          auVar343._36_4_ = 0xc0490fdb;
          auVar343._40_4_ = 0xc0490fdb;
          auVar343._44_4_ = 0xc0490fdb;
          auVar343._48_4_ = 0xc0490fdb;
          auVar343._52_4_ = 0xc0490fdb;
          auVar343._56_4_ = 0xc0490fdb;
          auVar343._60_4_ = 0xc0490fdb;
          auVar736 = vblendmps_avx512f(auVar717,auVar343);
          bVar12 = (bool)((byte)uVar47 & 1);
          in_ZMM21._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * auVar734._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          in_ZMM21._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * auVar734._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          in_ZMM21._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * auVar734._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          in_ZMM21._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * auVar734._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          in_ZMM21._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * auVar734._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          in_ZMM21._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * auVar734._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          in_ZMM21._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * auVar734._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          in_ZMM21._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * auVar734._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          in_ZMM21._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * auVar734._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          in_ZMM21._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * auVar734._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          in_ZMM21._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * auVar734._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          in_ZMM21._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * auVar734._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          in_ZMM21._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * auVar734._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          in_ZMM21._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * auVar734._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          in_ZMM21._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * auVar734._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          in_ZMM21._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * auVar734._60_4_;
          uVar47 = vcmpps_avx512f(auVar719,auVar733,1);
          auVar344._8_4_ = 0xbf800000;
          auVar344._0_8_ = 0xbf800000bf800000;
          auVar344._12_4_ = 0xbf800000;
          auVar344._16_4_ = 0xbf800000;
          auVar344._20_4_ = 0xbf800000;
          auVar344._24_4_ = 0xbf800000;
          auVar344._28_4_ = 0xbf800000;
          auVar344._32_4_ = 0xbf800000;
          auVar344._36_4_ = 0xbf800000;
          auVar344._40_4_ = 0xbf800000;
          auVar344._44_4_ = 0xbf800000;
          auVar344._48_4_ = 0xbf800000;
          auVar344._52_4_ = 0xbf800000;
          auVar344._56_4_ = 0xbf800000;
          auVar344._60_4_ = 0xbf800000;
          auVar734 = vblendmps_avx512f(auVar733,auVar344);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar795._0_4_ = (uint)bVar12 * auVar734._0_4_ | (uint)!bVar12 * in_ZMM22._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar795._4_4_ = (uint)bVar12 * auVar734._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar795._8_4_ = (uint)bVar12 * auVar734._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar795._12_4_ = (uint)bVar12 * auVar734._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar795._16_4_ = (uint)bVar12 * auVar734._16_4_ | (uint)!bVar12 * in_ZMM22._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar795._20_4_ = (uint)bVar12 * auVar734._20_4_ | (uint)!bVar12 * in_ZMM22._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar795._24_4_ = (uint)bVar12 * auVar734._24_4_ | (uint)!bVar12 * in_ZMM22._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar795._28_4_ = (uint)bVar12 * auVar734._28_4_ | (uint)!bVar12 * in_ZMM22._28_4_;
          bVar29 = (byte)(uVar47 >> 8);
          bVar12 = (bool)(bVar29 & 1);
          auVar795._32_4_ = (uint)bVar12 * auVar734._32_4_ | (uint)!bVar12 * in_ZMM22._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar795._36_4_ = (uint)bVar12 * auVar734._36_4_ | (uint)!bVar12 * in_ZMM22._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar795._40_4_ = (uint)bVar12 * auVar734._40_4_ | (uint)!bVar12 * in_ZMM22._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar795._44_4_ = (uint)bVar12 * auVar734._44_4_ | (uint)!bVar12 * in_ZMM22._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar795._48_4_ = (uint)bVar12 * auVar734._48_4_ | (uint)!bVar12 * in_ZMM22._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar795._52_4_ = (uint)bVar12 * auVar734._52_4_ | (uint)!bVar12 * in_ZMM22._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar795._56_4_ = (uint)bVar12 * auVar734._56_4_ | (uint)!bVar12 * in_ZMM22._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar795._60_4_ = (uint)bVar12 * auVar734._60_4_ | (uint)!bVar12 * in_ZMM22._60_4_;
          auVar734 = vmaxps_avx512f(auVar733,auVar719);
          uVar430 = vcmpps_avx512f(auVar737,auVar1774,4);
          auVar734 = vdivps_avx512f(auVar795,auVar734);
          uVar429 = vcmpps_avx512f(auVar852,auVar1774,4);
          in_ZMM22 = vmulps_avx512f(auVar734,auVar734);
          auVar733 = vmulps_avx512f(in_ZMM22,in_ZMM22);
          auVar736 = vfmadd213ps_avx512f(auVar720,auVar733,auVar721);
          auVar736 = vfmadd213ps_avx512f(auVar736,auVar733,auVar722);
          auVar731 = vfmadd213ps_avx512f(auVar724,auVar733,auVar725);
          auVar736 = vfmadd213ps_avx512f(auVar736,auVar733,auVar723);
          auVar731 = vfmadd213ps_avx512f(auVar731,auVar733,auVar726);
          auVar731 = vfmadd213ps_avx512f(auVar731,auVar733,auVar727);
          auVar733 = vfmadd213ps_avx512f(auVar731,auVar733,auVar719);
          uVar431 = vcmpps_avx512f(auVar852,auVar1774,1);
          auVar733 = vfmadd231ps_avx512f(auVar733,in_ZMM22,auVar736);
          auVar734 = vmulps_avx512f(auVar733,auVar734);
          auVar733 = vaddps_avx512f(auVar734,auVar728);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar796._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar734._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar796._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar734._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar796._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar734._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar796._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar734._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar796._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar734._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar796._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar734._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar796._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar734._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar796._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar734._28_4_;
          bVar12 = (bool)(bVar29 & 1);
          auVar796._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar734._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar796._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar734._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar796._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar734._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar796._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar734._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar796._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar734._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar796._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar734._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar796._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar734._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar796._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar734._60_4_;
          auVar734 = vpternlogd_avx512f(auVar796,in_ZMM19,auVar716,0xf8);
          auVar733 = vaddps_avx512f(auVar734,in_ZMM21);
          bVar12 = (bool)((byte)uVar431 & 1);
          in_ZMM20._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar734._0_4_;
          bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
          in_ZMM20._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar734._4_4_;
          bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
          in_ZMM20._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar734._8_4_;
          bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
          in_ZMM20._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar734._12_4_;
          bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
          in_ZMM20._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar734._16_4_;
          bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
          in_ZMM20._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar734._20_4_;
          bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
          in_ZMM20._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar734._24_4_;
          bVar12 = (bool)((byte)(uVar431 >> 7) & 1);
          in_ZMM20._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar734._28_4_;
          bVar12 = (bool)((byte)(uVar431 >> 8) & 1);
          in_ZMM20._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar734._32_4_;
          bVar12 = (bool)((byte)(uVar431 >> 9) & 1);
          in_ZMM20._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar734._36_4_;
          bVar12 = (bool)((byte)(uVar431 >> 10) & 1);
          in_ZMM20._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar734._40_4_;
          bVar12 = (bool)((byte)(uVar431 >> 0xb) & 1);
          in_ZMM20._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar734._44_4_;
          bVar12 = (bool)((byte)(uVar431 >> 0xc) & 1);
          in_ZMM20._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar734._48_4_;
          bVar12 = (bool)((byte)(uVar431 >> 0xd) & 1);
          in_ZMM20._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar734._52_4_;
          bVar12 = (bool)((byte)(uVar431 >> 0xe) & 1);
          in_ZMM20._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar734._56_4_;
          bVar12 = SUB81(uVar431 >> 0xf,0);
          in_ZMM20._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar734._60_4_;
          auVar734 = vpternlogd_avx512f(auVar852,auVar716,auVar729,0xea);
          uVar47 = vcmpps_avx512f(auVar734,auVar1774,1);
          auVar734 = vpternlogd_avx512f(auVar737,auVar716,auVar730,0xea);
          bVar12 = (bool)((byte)uVar429 & 1);
          bVar14 = (bool)((byte)(uVar429 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar429 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar429 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar429 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar429 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar429 >> 6) & 1);
          bVar20 = (bool)((byte)(uVar429 >> 7) & 1);
          bVar21 = (bool)((byte)(uVar429 >> 8) & 1);
          bVar22 = (bool)((byte)(uVar429 >> 9) & 1);
          bVar23 = (bool)((byte)(uVar429 >> 10) & 1);
          bVar24 = (bool)((byte)(uVar429 >> 0xb) & 1);
          bVar25 = (bool)((byte)(uVar429 >> 0xc) & 1);
          bVar26 = (bool)((byte)(uVar429 >> 0xd) & 1);
          bVar27 = (bool)((byte)(uVar429 >> 0xe) & 1);
          bVar28 = SUB81(uVar429 >> 0xf,0);
          bVar13 = (bool)((byte)uVar430 & 1);
          auVar797._0_4_ =
               (uint)bVar13 * (bVar12 * in_ZMM20._0_4_ | (uint)!bVar12 * auVar734._0_4_) |
               (uint)!bVar13 * (uint)((byte)uVar47 & 1) * auVar717._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar797._4_4_ =
               (uint)bVar12 * (bVar14 * in_ZMM20._4_4_ | (uint)!bVar14 * auVar734._4_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 1) & 1) * auVar717._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar797._8_4_ =
               (uint)bVar12 * (bVar15 * in_ZMM20._8_4_ | (uint)!bVar15 * auVar734._8_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 2) & 1) * auVar717._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar797._12_4_ =
               (uint)bVar12 * (bVar16 * in_ZMM20._12_4_ | (uint)!bVar16 * auVar734._12_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 3) & 1) * auVar717._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar797._16_4_ =
               (uint)bVar12 * (bVar17 * in_ZMM20._16_4_ | (uint)!bVar17 * auVar734._16_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 4) & 1) * auVar717._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar797._20_4_ =
               (uint)bVar12 * (bVar18 * in_ZMM20._20_4_ | (uint)!bVar18 * auVar734._20_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 5) & 1) * auVar717._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar797._24_4_ =
               (uint)bVar12 * (bVar19 * in_ZMM20._24_4_ | (uint)!bVar19 * auVar734._24_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 6) & 1) * auVar717._24_4_;
          bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
          auVar797._28_4_ =
               (uint)bVar12 * (bVar20 * in_ZMM20._28_4_ | (uint)!bVar20 * auVar734._28_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 7) & 1) * auVar717._28_4_;
          bVar12 = (bool)((byte)(uVar430 >> 8) & 1);
          auVar797._32_4_ =
               (uint)bVar12 * (bVar21 * in_ZMM20._32_4_ | (uint)!bVar21 * auVar734._32_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 8) & 1) * auVar717._32_4_;
          bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
          auVar797._36_4_ =
               (uint)bVar12 * (bVar22 * in_ZMM20._36_4_ | (uint)!bVar22 * auVar734._36_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 9) & 1) * auVar717._36_4_;
          bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
          auVar797._40_4_ =
               (uint)bVar12 * (bVar23 * in_ZMM20._40_4_ | (uint)!bVar23 * auVar734._40_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 10) & 1) * auVar717._40_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
          auVar797._44_4_ =
               (uint)bVar12 * (bVar24 * in_ZMM20._44_4_ | (uint)!bVar24 * auVar734._44_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xb) & 1) * auVar717._44_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
          auVar797._48_4_ =
               (uint)bVar12 * (bVar25 * in_ZMM20._48_4_ | (uint)!bVar25 * auVar734._48_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xc) & 1) * auVar717._48_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
          auVar797._52_4_ =
               (uint)bVar12 * (bVar26 * in_ZMM20._52_4_ | (uint)!bVar26 * auVar734._52_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xd) & 1) * auVar717._52_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
          auVar797._56_4_ =
               (uint)bVar12 * (bVar27 * in_ZMM20._56_4_ | (uint)!bVar27 * auVar734._56_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xe) & 1) * auVar717._56_4_;
          bVar12 = SUB81(uVar430 >> 0xf,0);
          auVar797._60_4_ =
               (uint)bVar12 * (bVar28 * in_ZMM20._60_4_ | (uint)!bVar28 * auVar734._60_4_) |
               (uint)!bVar12 * (uint)(byte)(uVar47 >> 0xf) * auVar717._60_4_;
          *(undefined1 (*) [64])outptr = auVar797;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar427 = uVar427 - 1;
          auVar734 = in_ZMM21;
        } while (uVar427 != 0);
      }
      if (iVar424 == 8) {
        uVar427 = 0;
        if (1 < (int)uVar425) {
          iVar426 = 1;
          auVar1774 = ZEXT1664((undefined1  [16])0x0);
          auVar716 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar718 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar725 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar726 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar727 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar728 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          auVar729 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar730 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar734 = in_ZMM20;
          do {
            auVar674 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar737 = *(undefined1 (*) [64])ptr;
            auVar677 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
            auVar852 = vinsertf64x4_avx512f(ZEXT3264(auVar674),auVar677,1);
            auVar733 = vdivps_avx512f(auVar737,auVar852);
            uVar47 = vcmpps_avx512f(auVar737,auVar1774,1);
            auVar736 = vandps_avx512dq(auVar733,auVar718);
            auVar345._8_4_ = 0xc0490fdb;
            auVar345._0_8_ = 0xc0490fdbc0490fdb;
            auVar345._12_4_ = 0xc0490fdb;
            auVar345._16_4_ = 0xc0490fdb;
            auVar345._20_4_ = 0xc0490fdb;
            auVar345._24_4_ = 0xc0490fdb;
            auVar345._28_4_ = 0xc0490fdb;
            auVar345._32_4_ = 0xc0490fdb;
            auVar345._36_4_ = 0xc0490fdb;
            auVar345._40_4_ = 0xc0490fdb;
            auVar345._44_4_ = 0xc0490fdb;
            auVar345._48_4_ = 0xc0490fdb;
            auVar345._52_4_ = 0xc0490fdb;
            auVar345._56_4_ = 0xc0490fdb;
            auVar345._60_4_ = 0xc0490fdb;
            auVar731 = vblendmps_avx512f(auVar717,auVar345);
            bVar12 = (bool)((byte)uVar47 & 1);
            in_ZMM20._0_4_ = (uint)bVar12 * auVar731._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            in_ZMM20._4_4_ = (uint)bVar12 * auVar731._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            in_ZMM20._8_4_ = (uint)bVar12 * auVar731._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            in_ZMM20._12_4_ = (uint)bVar12 * auVar731._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            in_ZMM20._16_4_ = (uint)bVar12 * auVar731._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            in_ZMM20._20_4_ = (uint)bVar12 * auVar731._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            in_ZMM20._24_4_ = (uint)bVar12 * auVar731._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            in_ZMM20._28_4_ = (uint)bVar12 * auVar731._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            in_ZMM20._32_4_ = (uint)bVar12 * auVar731._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            in_ZMM20._36_4_ = (uint)bVar12 * auVar731._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            in_ZMM20._40_4_ = (uint)bVar12 * auVar731._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            in_ZMM20._44_4_ = (uint)bVar12 * auVar731._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            in_ZMM20._48_4_ = (uint)bVar12 * auVar731._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            in_ZMM20._52_4_ = (uint)bVar12 * auVar731._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            in_ZMM20._56_4_ = (uint)bVar12 * auVar731._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            in_ZMM20._60_4_ = (uint)bVar12 * auVar731._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            uVar47 = vcmpps_avx512f(auVar719,auVar736,1);
            auVar346._8_4_ = 0xbf800000;
            auVar346._0_8_ = 0xbf800000bf800000;
            auVar346._12_4_ = 0xbf800000;
            auVar346._16_4_ = 0xbf800000;
            auVar346._20_4_ = 0xbf800000;
            auVar346._24_4_ = 0xbf800000;
            auVar346._28_4_ = 0xbf800000;
            auVar346._32_4_ = 0xbf800000;
            auVar346._36_4_ = 0xbf800000;
            auVar346._40_4_ = 0xbf800000;
            auVar346._44_4_ = 0xbf800000;
            auVar346._48_4_ = 0xbf800000;
            auVar346._52_4_ = 0xbf800000;
            auVar346._56_4_ = 0xbf800000;
            auVar346._60_4_ = 0xbf800000;
            auVar734 = vblendmps_avx512f(auVar736,auVar346);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar798._0_4_ = (uint)bVar12 * auVar734._0_4_ | (uint)!bVar12 * in_ZMM21._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar798._4_4_ = (uint)bVar12 * auVar734._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar798._8_4_ = (uint)bVar12 * auVar734._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar798._12_4_ = (uint)bVar12 * auVar734._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar798._16_4_ = (uint)bVar12 * auVar734._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar798._20_4_ = (uint)bVar12 * auVar734._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar798._24_4_ = (uint)bVar12 * auVar734._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar798._28_4_ = (uint)bVar12 * auVar734._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
            bVar29 = (byte)(uVar47 >> 8);
            bVar12 = (bool)(bVar29 & 1);
            auVar798._32_4_ = (uint)bVar12 * auVar734._32_4_ | (uint)!bVar12 * in_ZMM21._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar798._36_4_ = (uint)bVar12 * auVar734._36_4_ | (uint)!bVar12 * in_ZMM21._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar798._40_4_ = (uint)bVar12 * auVar734._40_4_ | (uint)!bVar12 * in_ZMM21._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar798._44_4_ = (uint)bVar12 * auVar734._44_4_ | (uint)!bVar12 * in_ZMM21._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar798._48_4_ = (uint)bVar12 * auVar734._48_4_ | (uint)!bVar12 * in_ZMM21._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar798._52_4_ = (uint)bVar12 * auVar734._52_4_ | (uint)!bVar12 * in_ZMM21._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar798._56_4_ = (uint)bVar12 * auVar734._56_4_ | (uint)!bVar12 * in_ZMM21._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar798._60_4_ = (uint)bVar12 * auVar734._60_4_ | (uint)!bVar12 * in_ZMM21._60_4_;
            auVar734 = vmaxps_avx512f(auVar736,auVar719);
            auVar734 = vdivps_avx512f(auVar798,auVar734);
            uVar430 = vcmpps_avx512f(auVar737,auVar1774,4);
            in_ZMM21 = vmulps_avx512f(auVar734,auVar734);
            uVar429 = vcmpps_avx512f(auVar852,auVar1774,4);
            in_ZMM22 = vmulps_avx512f(in_ZMM21,in_ZMM21);
            auVar736 = vfmadd213ps_avx512f(auVar720,in_ZMM22,auVar721);
            auVar736 = vfmadd213ps_avx512f(auVar736,in_ZMM22,auVar722);
            auVar731 = vfmadd213ps_avx512f(auVar724,in_ZMM22,auVar725);
            auVar731 = vfmadd213ps_avx512f(auVar731,in_ZMM22,auVar726);
            auVar736 = vfmadd213ps_avx512f(auVar736,in_ZMM22,auVar723);
            auVar731 = vfmadd213ps_avx512f(auVar731,in_ZMM22,auVar727);
            auVar731 = vfmadd213ps_avx512f(auVar731,in_ZMM22,auVar719);
            auVar736 = vfmadd231ps_avx512f(auVar731,in_ZMM21,auVar736);
            uVar431 = vcmpps_avx512f(auVar852,auVar1774,1);
            auVar734 = vmulps_avx512f(auVar736,auVar734);
            auVar736 = vaddps_avx512f(auVar734,auVar728);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar799._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar799._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar799._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar799._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar799._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar799._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar799._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar799._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)(bVar29 & 1);
            auVar799._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar799._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar799._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar799._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar799._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar799._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar799._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar799._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            auVar734 = vpternlogd_avx512f(auVar799,auVar733,auVar716,0xf8);
            auVar733 = vaddps_avx512f(auVar734,in_ZMM20);
            bVar12 = (bool)((byte)uVar431 & 1);
            in_ZMM19._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
            in_ZMM19._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
            in_ZMM19._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
            in_ZMM19._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
            in_ZMM19._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
            in_ZMM19._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
            in_ZMM19._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar431 >> 7) & 1);
            in_ZMM19._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)((byte)(uVar431 >> 8) & 1);
            in_ZMM19._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar431 >> 9) & 1);
            in_ZMM19._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar431 >> 10) & 1);
            in_ZMM19._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xb) & 1);
            in_ZMM19._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xc) & 1);
            in_ZMM19._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xd) & 1);
            in_ZMM19._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xe) & 1);
            in_ZMM19._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar431 >> 0xf,0);
            in_ZMM19._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            auVar734 = vpternlogd_avx512f(auVar852,auVar716,auVar729,0xea);
            uVar47 = vcmpps_avx512f(auVar734,auVar1774,1);
            auVar734 = vpternlogd_avx512f(auVar737,auVar716,auVar730,0xea);
            bVar12 = (bool)((byte)uVar429 & 1);
            bVar14 = (bool)((byte)(uVar429 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar429 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar429 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar429 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar429 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar429 >> 6) & 1);
            bVar20 = (bool)((byte)(uVar429 >> 7) & 1);
            bVar21 = (bool)((byte)(uVar429 >> 8) & 1);
            bVar22 = (bool)((byte)(uVar429 >> 9) & 1);
            bVar23 = (bool)((byte)(uVar429 >> 10) & 1);
            bVar24 = (bool)((byte)(uVar429 >> 0xb) & 1);
            bVar25 = (bool)((byte)(uVar429 >> 0xc) & 1);
            bVar26 = (bool)((byte)(uVar429 >> 0xd) & 1);
            bVar27 = (bool)((byte)(uVar429 >> 0xe) & 1);
            bVar28 = SUB81(uVar429 >> 0xf,0);
            bVar13 = (bool)((byte)uVar430 & 1);
            auVar800._0_4_ =
                 (uint)bVar13 * (bVar12 * in_ZMM19._0_4_ | (uint)!bVar12 * auVar734._0_4_) |
                 (uint)!bVar13 * (uint)((byte)uVar47 & 1) * auVar717._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar800._4_4_ =
                 (uint)bVar12 * (bVar14 * in_ZMM19._4_4_ | (uint)!bVar14 * auVar734._4_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 1) & 1) * auVar717._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar800._8_4_ =
                 (uint)bVar12 * (bVar15 * in_ZMM19._8_4_ | (uint)!bVar15 * auVar734._8_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 2) & 1) * auVar717._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar800._12_4_ =
                 (uint)bVar12 * (bVar16 * in_ZMM19._12_4_ | (uint)!bVar16 * auVar734._12_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 3) & 1) * auVar717._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar800._16_4_ =
                 (uint)bVar12 * (bVar17 * in_ZMM19._16_4_ | (uint)!bVar17 * auVar734._16_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 4) & 1) * auVar717._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar800._20_4_ =
                 (uint)bVar12 * (bVar18 * in_ZMM19._20_4_ | (uint)!bVar18 * auVar734._20_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 5) & 1) * auVar717._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar800._24_4_ =
                 (uint)bVar12 * (bVar19 * in_ZMM19._24_4_ | (uint)!bVar19 * auVar734._24_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 6) & 1) * auVar717._24_4_;
            bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
            auVar800._28_4_ =
                 (uint)bVar12 * (bVar20 * in_ZMM19._28_4_ | (uint)!bVar20 * auVar734._28_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 7) & 1) * auVar717._28_4_;
            bVar12 = (bool)((byte)(uVar430 >> 8) & 1);
            auVar800._32_4_ =
                 (uint)bVar12 * (bVar21 * in_ZMM19._32_4_ | (uint)!bVar21 * auVar734._32_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 8) & 1) * auVar717._32_4_;
            bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
            auVar800._36_4_ =
                 (uint)bVar12 * (bVar22 * in_ZMM19._36_4_ | (uint)!bVar22 * auVar734._36_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 9) & 1) * auVar717._36_4_;
            bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
            auVar800._40_4_ =
                 (uint)bVar12 * (bVar23 * in_ZMM19._40_4_ | (uint)!bVar23 * auVar734._40_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 10) & 1) * auVar717._40_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
            auVar800._44_4_ =
                 (uint)bVar12 * (bVar24 * in_ZMM19._44_4_ | (uint)!bVar24 * auVar734._44_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xb) & 1) * auVar717._44_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
            auVar800._48_4_ =
                 (uint)bVar12 * (bVar25 * in_ZMM19._48_4_ | (uint)!bVar25 * auVar734._48_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xc) & 1) * auVar717._48_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
            auVar800._52_4_ =
                 (uint)bVar12 * (bVar26 * in_ZMM19._52_4_ | (uint)!bVar26 * auVar734._52_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xd) & 1) * auVar717._52_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
            auVar800._56_4_ =
                 (uint)bVar12 * (bVar27 * in_ZMM19._56_4_ | (uint)!bVar27 * auVar734._56_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xe) & 1) * auVar717._56_4_;
            bVar12 = SUB81(uVar430 >> 0xf,0);
            auVar800._60_4_ =
                 (uint)bVar12 * (bVar28 * in_ZMM19._60_4_ | (uint)!bVar28 * auVar734._60_4_) |
                 (uint)!bVar12 * (uint)(byte)(uVar47 >> 0xf) * auVar717._60_4_;
            ptr = (float *)((long)ptr + 0x40);
            *(undefined1 (*) [64])outptr = auVar800;
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar426 = iVar426 + 2;
            auVar734 = in_ZMM20;
          } while (iVar426 < (int)uVar425);
          uVar427 = uVar425 & 0x7ffffffe;
        }
        iVar426 = uVar425 - uVar427;
        if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
          auVar926._8_4_ = 0x80000000;
          auVar926._0_8_ = 0x8000000080000000;
          auVar926._12_4_ = 0x80000000;
          auVar926._16_4_ = 0x80000000;
          auVar926._20_4_ = 0x80000000;
          auVar926._24_4_ = 0x80000000;
          auVar926._28_4_ = 0x80000000;
          auVar1001._8_4_ = 0x40490fdb;
          auVar1001._0_8_ = 0x40490fdb40490fdb;
          auVar1001._12_4_ = 0x40490fdb;
          auVar1001._16_4_ = 0x40490fdb;
          auVar1001._20_4_ = 0x40490fdb;
          auVar1001._24_4_ = 0x40490fdb;
          auVar1001._28_4_ = 0x40490fdb;
          auVar442 = ZEXT816(0) << 0x40;
          auVar1202._8_4_ = 0x7fffffff;
          auVar1202._0_8_ = 0x7fffffff7fffffff;
          auVar1202._12_4_ = 0x7fffffff;
          auVar1202._16_4_ = 0x7fffffff;
          auVar1202._20_4_ = 0x7fffffff;
          auVar1202._24_4_ = 0x7fffffff;
          auVar1202._28_4_ = 0x7fffffff;
          auVar1259._8_4_ = 0x3f800000;
          auVar1259._0_8_ = 0x3f8000003f800000;
          auVar1259._12_4_ = 0x3f800000;
          auVar1259._16_4_ = 0x3f800000;
          auVar1259._20_4_ = 0x3f800000;
          auVar1259._24_4_ = 0x3f800000;
          auVar1259._28_4_ = 0x3f800000;
          auVar1321._8_4_ = 0xbc83a25c;
          auVar1321._0_8_ = 0xbc83a25cbc83a25c;
          auVar1321._12_4_ = 0xbc83a25c;
          auVar1321._16_4_ = 0xbc83a25c;
          auVar1321._20_4_ = 0xbc83a25c;
          auVar1321._24_4_ = 0xbc83a25c;
          auVar1321._28_4_ = 0xbc83a25c;
          auVar1379._8_4_ = 0xbd99b01e;
          auVar1379._0_8_ = 0xbd99b01ebd99b01e;
          auVar1379._12_4_ = 0xbd99b01e;
          auVar1379._16_4_ = 0xbd99b01e;
          auVar1379._20_4_ = 0xbd99b01e;
          auVar1379._24_4_ = 0xbd99b01e;
          auVar1379._28_4_ = 0xbd99b01e;
          auVar1435._8_4_ = 0xbe117200;
          auVar1435._0_8_ = 0xbe117200be117200;
          auVar1435._12_4_ = 0xbe117200;
          auVar1435._16_4_ = 0xbe117200;
          auVar1435._20_4_ = 0xbe117200;
          auVar1435._24_4_ = 0xbe117200;
          auVar1435._28_4_ = 0xbe117200;
          auVar1489._8_4_ = 0xbeaaaa53;
          auVar1489._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1489._12_4_ = 0xbeaaaa53;
          auVar1489._16_4_ = 0xbeaaaa53;
          auVar1489._20_4_ = 0xbeaaaa53;
          auVar1489._24_4_ = 0xbeaaaa53;
          auVar1489._28_4_ = 0xbeaaaa53;
          auVar1543._8_4_ = 0x3b3ac537;
          auVar1543._0_8_ = 0x3b3ac5373b3ac537;
          auVar1543._12_4_ = 0x3b3ac537;
          auVar1543._16_4_ = 0x3b3ac537;
          auVar1543._20_4_ = 0x3b3ac537;
          auVar1543._24_4_ = 0x3b3ac537;
          auVar1543._28_4_ = 0x3b3ac537;
          auVar1597._8_4_ = 0x3d2edd4e;
          auVar1597._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1597._12_4_ = 0x3d2edd4e;
          auVar1597._16_4_ = 0x3d2edd4e;
          auVar1597._20_4_ = 0x3d2edd4e;
          auVar1597._24_4_ = 0x3d2edd4e;
          auVar1597._28_4_ = 0x3d2edd4e;
          auVar1651._8_4_ = 0x3dd9ed24;
          auVar1651._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1651._12_4_ = 0x3dd9ed24;
          auVar1651._16_4_ = 0x3dd9ed24;
          auVar1651._20_4_ = 0x3dd9ed24;
          auVar1651._24_4_ = 0x3dd9ed24;
          auVar1651._28_4_ = 0x3dd9ed24;
          auVar1705._8_4_ = 0x3e4cb974;
          auVar1705._0_8_ = 0x3e4cb9743e4cb974;
          auVar1705._12_4_ = 0x3e4cb974;
          auVar1705._16_4_ = 0x3e4cb974;
          auVar1705._20_4_ = 0x3e4cb974;
          auVar1705._24_4_ = 0x3e4cb974;
          auVar1705._28_4_ = 0x3e4cb974;
          auVar1756._8_4_ = 0x3fc90fdb;
          auVar1756._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1756._12_4_ = 0x3fc90fdb;
          auVar1756._16_4_ = 0x3fc90fdb;
          auVar1756._20_4_ = 0x3fc90fdb;
          auVar1756._24_4_ = 0x3fc90fdb;
          auVar1756._28_4_ = 0x3fc90fdb;
          auVar1807._8_4_ = 0x40490fdb;
          auVar1807._0_8_ = 0x40490fdb40490fdb;
          auVar1807._12_4_ = 0x40490fdb;
          auVar1807._16_4_ = 0x40490fdb;
          auVar1807._20_4_ = 0x40490fdb;
          auVar1807._24_4_ = 0x40490fdb;
          auVar1807._28_4_ = 0x40490fdb;
          auVar674 = vpbroadcastd_avx512vl(ZEXT416(0x3fc90fdb));
          do {
            auVar678 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar677 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
            auVar460 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar678._0_16_);
            auVar562 = vbroadcastss_avx512vl(auVar460);
            auVar562 = vmulps_avx512vl(auVar677,auVar562);
            in_ZMM19 = ZEXT3264(auVar562);
            uVar47 = vcmpps_avx512vl(auVar677,ZEXT1632(auVar442),1);
            vandps_avx512vl(auVar562,auVar1202);
            auVar190._8_4_ = 0xc0490fdb;
            auVar190._0_8_ = 0xc0490fdbc0490fdb;
            auVar190._12_4_ = 0xc0490fdb;
            auVar190._16_4_ = 0xc0490fdb;
            auVar190._20_4_ = 0xc0490fdb;
            auVar190._24_4_ = 0xc0490fdb;
            auVar190._28_4_ = 0xc0490fdb;
            auVar679 = vblendmps_avx512vl(auVar1001,auVar190);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar619._0_4_ = (uint)bVar12 * auVar679._0_4_ | (uint)!bVar12 * in_ZMM21._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar619._4_4_ = (uint)bVar12 * auVar679._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar619._8_4_ = (uint)bVar12 * auVar679._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar619._12_4_ = (uint)bVar12 * auVar679._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar619._16_4_ = (uint)bVar12 * auVar679._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar619._20_4_ = (uint)bVar12 * auVar679._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar619._24_4_ = (uint)bVar12 * auVar679._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar619._28_4_ = (uint)bVar12 * auVar679._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
            in_ZMM21 = ZEXT3264(auVar619);
            uVar47 = vcmpps_avx512vl(auVar1259,auVar562,1);
            auVar191._8_4_ = 0xbf800000;
            auVar191._0_8_ = 0xbf800000bf800000;
            auVar191._12_4_ = 0xbf800000;
            auVar191._16_4_ = 0xbf800000;
            auVar191._20_4_ = 0xbf800000;
            auVar191._24_4_ = 0xbf800000;
            auVar191._28_4_ = 0xbf800000;
            auVar679 = vblendmps_avx512vl(auVar562,auVar191);
            bVar29 = (byte)uVar47;
            auVar620._0_4_ =
                 (uint)(bVar29 & 1) * auVar679._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM22._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar620._4_4_ = (uint)bVar12 * auVar679._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar620._8_4_ = (uint)bVar12 * auVar679._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar620._12_4_ = (uint)bVar12 * auVar679._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar620._16_4_ = (uint)bVar12 * auVar679._16_4_ | (uint)!bVar12 * in_ZMM22._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar620._20_4_ = (uint)bVar12 * auVar679._20_4_ | (uint)!bVar12 * in_ZMM22._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar620._24_4_ = (uint)bVar12 * auVar679._24_4_ | (uint)!bVar12 * in_ZMM22._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar620._28_4_ = (uint)bVar12 * auVar679._28_4_ | (uint)!bVar12 * in_ZMM22._28_4_;
            auVar679 = vdivps_avx512vl(auVar620,auVar562);
            auVar621._0_4_ =
                 (uint)(bVar29 & 1) * auVar679._0_4_ | !(bool)(bVar29 & 1) * auVar620._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar621._4_4_ = (uint)bVar12 * auVar679._4_4_ | !bVar12 * auVar620._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar621._8_4_ = (uint)bVar12 * auVar679._8_4_ | !bVar12 * auVar620._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar621._12_4_ = (uint)bVar12 * auVar679._12_4_ | !bVar12 * auVar620._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar621._16_4_ = (uint)bVar12 * auVar679._16_4_ | !bVar12 * auVar620._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar621._20_4_ = (uint)bVar12 * auVar679._20_4_ | !bVar12 * auVar620._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar621._24_4_ = (uint)bVar12 * auVar679._24_4_ | !bVar12 * auVar620._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar621._28_4_ = (uint)bVar12 * auVar679._28_4_ | !bVar12 * auVar620._28_4_;
            in_ZMM22 = ZEXT3264(auVar621);
            uVar430 = vcmpps_avx512vl(auVar677,ZEXT1632(auVar442),4);
            auVar679 = vmulps_avx512vl(auVar621,auVar621);
            auVar680 = vmulps_avx512vl(auVar679,auVar679);
            auVar685 = ZEXT1632(auVar442);
            uVar429 = vcmpps_avx512vl(auVar678,auVar685,1);
            auVar683 = vfmadd213ps_avx512vl(auVar1321,auVar680,auVar1379);
            auVar683 = vfmadd213ps_avx512vl(auVar683,auVar680,auVar1435);
            auVar684 = vfmadd213ps_avx512vl(auVar1543,auVar680,auVar1597);
            auVar684 = vfmadd213ps_avx512vl(auVar684,auVar680,auVar1651);
            auVar684 = vfmadd213ps_avx512vl(auVar684,auVar680,auVar1705);
            auVar683 = vfmadd213ps_avx512vl(auVar683,auVar680,auVar1489);
            auVar680 = vfmadd213ps_avx512vl(auVar684,auVar680,auVar1259);
            auVar679 = vfmadd231ps_avx512vl(auVar680,auVar679,auVar683);
            auVar679 = vmulps_avx512vl(auVar679,auVar621);
            uVar431 = vcmpps_avx512vl(auVar678,auVar685,4);
            uVar431 = uVar430 & uVar431;
            auVar680 = vaddps_avx512vl(auVar679,auVar1756);
            auVar622._0_4_ =
                 (uint)(bVar29 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar679._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar622._4_4_ = (uint)bVar12 * auVar680._4_4_ | (uint)!bVar12 * auVar679._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar622._8_4_ = (uint)bVar12 * auVar680._8_4_ | (uint)!bVar12 * auVar679._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar622._12_4_ = (uint)bVar12 * auVar680._12_4_ | (uint)!bVar12 * auVar679._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar622._16_4_ = (uint)bVar12 * auVar680._16_4_ | (uint)!bVar12 * auVar679._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar622._20_4_ = (uint)bVar12 * auVar680._20_4_ | (uint)!bVar12 * auVar679._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar622._24_4_ = (uint)bVar12 * auVar680._24_4_ | (uint)!bVar12 * auVar679._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar622._28_4_ = (uint)bVar12 * auVar680._28_4_ | (uint)!bVar12 * auVar679._28_4_;
            auVar678 = vpternlogd_avx512vl(auVar678,auVar1807,auVar926,0xec);
            uVar46 = vcmpps_avx512vl(auVar685,auVar678,2);
            auVar678 = vpternlogd_avx512vl(auVar622,auVar562,auVar926,0xf8);
            bVar29 = ~((byte)uVar430 | (byte)uVar46);
            auVar562 = vmovdqa32_avx512vl(auVar1807);
            iVar2 = (uint)(bVar29 & 1) * auVar562._0_4_;
            iVar4 = (uint)(bVar29 >> 1 & 1) * auVar562._4_4_;
            auVar623._4_4_ = iVar4;
            auVar623._0_4_ = iVar2;
            iVar5 = (uint)(bVar29 >> 2 & 1) * auVar562._8_4_;
            auVar623._8_4_ = iVar5;
            iVar1 = (uint)(bVar29 >> 3 & 1) * auVar562._12_4_;
            auVar623._12_4_ = iVar1;
            iVar7 = (uint)(bVar29 >> 4 & 1) * auVar562._16_4_;
            auVar623._16_4_ = iVar7;
            iVar8 = (uint)(bVar29 >> 5 & 1) * auVar562._20_4_;
            auVar623._20_4_ = iVar8;
            iVar6 = (uint)(bVar29 >> 6 & 1) * auVar562._24_4_;
            auVar623._24_4_ = iVar6;
            iVar3 = (uint)(bVar29 >> 7) * auVar562._28_4_;
            auVar623._28_4_ = iVar3;
            auVar562 = vaddps_avx512vl(auVar678,auVar619);
            bVar12 = (bool)((byte)uVar429 & 1);
            uVar427 = (uint)bVar12 * auVar562._0_4_ | (uint)!bVar12 * auVar678._0_4_;
            bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
            uVar882 = (uint)bVar12 * auVar562._4_4_ | (uint)!bVar12 * auVar678._4_4_;
            bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
            uVar883 = (uint)bVar12 * auVar562._8_4_ | (uint)!bVar12 * auVar678._8_4_;
            bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
            uVar884 = (uint)bVar12 * auVar562._12_4_ | (uint)!bVar12 * auVar678._12_4_;
            bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
            uVar885 = (uint)bVar12 * auVar562._16_4_ | (uint)!bVar12 * auVar678._16_4_;
            bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
            uVar886 = (uint)bVar12 * auVar562._20_4_ | (uint)!bVar12 * auVar678._20_4_;
            bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
            uVar887 = (uint)bVar12 * auVar562._24_4_ | (uint)!bVar12 * auVar678._24_4_;
            bVar12 = SUB81(uVar429 >> 7,0);
            uVar888 = (uint)bVar12 * auVar562._28_4_ | (uint)!bVar12 * auVar678._28_4_;
            in_ZMM20 = ZEXT3264(CONCAT428(uVar888,CONCAT424(uVar887,CONCAT420(uVar886,CONCAT416(
                                                  uVar885,CONCAT412(uVar884,CONCAT48(uVar883,
                                                  CONCAT44(uVar882,uVar427))))))));
            auVar677 = vpternlogd_avx512vl(auVar677,auVar623,auVar926,0xec);
            auVar677 = vpord_avx512vl(auVar677,auVar674);
            bVar12 = (bool)((byte)uVar430 & 1);
            bVar14 = (bool)((byte)(uVar430 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar430 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar430 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar430 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar430 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar430 >> 6) & 1);
            bVar20 = SUB81(uVar430 >> 7,0);
            bVar13 = (bool)((byte)uVar431 & 1);
            auVar624._0_4_ =
                 bVar13 * uVar427 |
                 (uint)!bVar13 * ((uint)bVar12 * auVar677._0_4_ | (uint)!bVar12 * iVar2);
            bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
            auVar624._4_4_ =
                 bVar12 * uVar882 |
                 (uint)!bVar12 * ((uint)bVar14 * auVar677._4_4_ | (uint)!bVar14 * iVar4);
            bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
            auVar624._8_4_ =
                 bVar12 * uVar883 |
                 (uint)!bVar12 * ((uint)bVar15 * auVar677._8_4_ | (uint)!bVar15 * iVar5);
            bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
            auVar624._12_4_ =
                 bVar12 * uVar884 |
                 (uint)!bVar12 * ((uint)bVar16 * auVar677._12_4_ | (uint)!bVar16 * iVar1);
            bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
            auVar624._16_4_ =
                 bVar12 * uVar885 |
                 (uint)!bVar12 * ((uint)bVar17 * auVar677._16_4_ | (uint)!bVar17 * iVar7);
            bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
            auVar624._20_4_ =
                 bVar12 * uVar886 |
                 (uint)!bVar12 * ((uint)bVar18 * auVar677._20_4_ | (uint)!bVar18 * iVar8);
            bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
            auVar624._24_4_ =
                 bVar12 * uVar887 |
                 (uint)!bVar12 * ((uint)bVar19 * auVar677._24_4_ | (uint)!bVar19 * iVar6);
            bVar12 = SUB81(uVar431 >> 7,0);
            auVar624._28_4_ =
                 bVar12 * uVar888 |
                 (uint)!bVar12 * ((uint)bVar20 * auVar677._28_4_ | (uint)!bVar20 * iVar3);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar624;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar426 = iVar426 + -1;
          } while (iVar426 != 0);
        }
      }
      if (iVar424 != 4) {
        return;
      }
      uVar427 = 0;
      if (3 < (int)uVar425) {
        iVar424 = 3;
        auVar1774 = ZEXT1664((undefined1  [16])0x0);
        auVar716 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar717 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar718 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar719 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar720 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar721 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar722 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar723 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar724 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar725 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar726 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar727 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar728 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar729 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        auVar730 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        auVar734 = in_ZMM20;
        do {
          auVar442 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[2]));
          auVar460 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[3]));
          auVar737 = *(undefined1 (*) [64])ptr;
          auVar461 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          auVar674 = vinsertf32x4_avx512vl(ZEXT1632(auVar442),auVar460,1);
          auVar442 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
          auVar677 = vinsertf32x4_avx512vl(ZEXT1632(auVar461),auVar442,1);
          auVar852 = vinsertf64x4_avx512f(ZEXT3264(auVar677),auVar674,1);
          auVar733 = vdivps_avx512f(auVar737,auVar852);
          uVar47 = vcmpps_avx512f(auVar737,auVar1774,1);
          auVar736 = vandps_avx512dq(auVar733,auVar718);
          auVar347._8_4_ = 0xc0490fdb;
          auVar347._0_8_ = 0xc0490fdbc0490fdb;
          auVar347._12_4_ = 0xc0490fdb;
          auVar347._16_4_ = 0xc0490fdb;
          auVar347._20_4_ = 0xc0490fdb;
          auVar347._24_4_ = 0xc0490fdb;
          auVar347._28_4_ = 0xc0490fdb;
          auVar347._32_4_ = 0xc0490fdb;
          auVar347._36_4_ = 0xc0490fdb;
          auVar347._40_4_ = 0xc0490fdb;
          auVar347._44_4_ = 0xc0490fdb;
          auVar347._48_4_ = 0xc0490fdb;
          auVar347._52_4_ = 0xc0490fdb;
          auVar347._56_4_ = 0xc0490fdb;
          auVar347._60_4_ = 0xc0490fdb;
          auVar731 = vblendmps_avx512f(auVar717,auVar347);
          bVar12 = (bool)((byte)uVar47 & 1);
          in_ZMM20._0_4_ = (uint)bVar12 * auVar731._0_4_ | (uint)!bVar12 * auVar734._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          in_ZMM20._4_4_ = (uint)bVar12 * auVar731._4_4_ | (uint)!bVar12 * auVar734._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          in_ZMM20._8_4_ = (uint)bVar12 * auVar731._8_4_ | (uint)!bVar12 * auVar734._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          in_ZMM20._12_4_ = (uint)bVar12 * auVar731._12_4_ | (uint)!bVar12 * auVar734._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          in_ZMM20._16_4_ = (uint)bVar12 * auVar731._16_4_ | (uint)!bVar12 * auVar734._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          in_ZMM20._20_4_ = (uint)bVar12 * auVar731._20_4_ | (uint)!bVar12 * auVar734._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          in_ZMM20._24_4_ = (uint)bVar12 * auVar731._24_4_ | (uint)!bVar12 * auVar734._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          in_ZMM20._28_4_ = (uint)bVar12 * auVar731._28_4_ | (uint)!bVar12 * auVar734._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          in_ZMM20._32_4_ = (uint)bVar12 * auVar731._32_4_ | (uint)!bVar12 * auVar734._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          in_ZMM20._36_4_ = (uint)bVar12 * auVar731._36_4_ | (uint)!bVar12 * auVar734._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          in_ZMM20._40_4_ = (uint)bVar12 * auVar731._40_4_ | (uint)!bVar12 * auVar734._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          in_ZMM20._44_4_ = (uint)bVar12 * auVar731._44_4_ | (uint)!bVar12 * auVar734._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          in_ZMM20._48_4_ = (uint)bVar12 * auVar731._48_4_ | (uint)!bVar12 * auVar734._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          in_ZMM20._52_4_ = (uint)bVar12 * auVar731._52_4_ | (uint)!bVar12 * auVar734._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          in_ZMM20._56_4_ = (uint)bVar12 * auVar731._56_4_ | (uint)!bVar12 * auVar734._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          in_ZMM20._60_4_ = (uint)bVar12 * auVar731._60_4_ | (uint)!bVar12 * auVar734._60_4_;
          uVar47 = vcmpps_avx512f(auVar719,auVar736,1);
          auVar348._8_4_ = 0xbf800000;
          auVar348._0_8_ = 0xbf800000bf800000;
          auVar348._12_4_ = 0xbf800000;
          auVar348._16_4_ = 0xbf800000;
          auVar348._20_4_ = 0xbf800000;
          auVar348._24_4_ = 0xbf800000;
          auVar348._28_4_ = 0xbf800000;
          auVar348._32_4_ = 0xbf800000;
          auVar348._36_4_ = 0xbf800000;
          auVar348._40_4_ = 0xbf800000;
          auVar348._44_4_ = 0xbf800000;
          auVar348._48_4_ = 0xbf800000;
          auVar348._52_4_ = 0xbf800000;
          auVar348._56_4_ = 0xbf800000;
          auVar348._60_4_ = 0xbf800000;
          auVar734 = vblendmps_avx512f(auVar736,auVar348);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar801._0_4_ = (uint)bVar12 * auVar734._0_4_ | (uint)!bVar12 * in_ZMM21._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar801._4_4_ = (uint)bVar12 * auVar734._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar801._8_4_ = (uint)bVar12 * auVar734._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar801._12_4_ = (uint)bVar12 * auVar734._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar801._16_4_ = (uint)bVar12 * auVar734._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar801._20_4_ = (uint)bVar12 * auVar734._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar801._24_4_ = (uint)bVar12 * auVar734._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar801._28_4_ = (uint)bVar12 * auVar734._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
          bVar29 = (byte)(uVar47 >> 8);
          bVar12 = (bool)(bVar29 & 1);
          auVar801._32_4_ = (uint)bVar12 * auVar734._32_4_ | (uint)!bVar12 * in_ZMM21._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar801._36_4_ = (uint)bVar12 * auVar734._36_4_ | (uint)!bVar12 * in_ZMM21._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar801._40_4_ = (uint)bVar12 * auVar734._40_4_ | (uint)!bVar12 * in_ZMM21._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar801._44_4_ = (uint)bVar12 * auVar734._44_4_ | (uint)!bVar12 * in_ZMM21._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar801._48_4_ = (uint)bVar12 * auVar734._48_4_ | (uint)!bVar12 * in_ZMM21._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar801._52_4_ = (uint)bVar12 * auVar734._52_4_ | (uint)!bVar12 * in_ZMM21._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar801._56_4_ = (uint)bVar12 * auVar734._56_4_ | (uint)!bVar12 * in_ZMM21._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar801._60_4_ = (uint)bVar12 * auVar734._60_4_ | (uint)!bVar12 * in_ZMM21._60_4_;
          auVar734 = vmaxps_avx512f(auVar736,auVar719);
          auVar734 = vdivps_avx512f(auVar801,auVar734);
          uVar430 = vcmpps_avx512f(auVar737,auVar1774,4);
          in_ZMM21 = vmulps_avx512f(auVar734,auVar734);
          uVar429 = vcmpps_avx512f(auVar852,auVar1774,4);
          in_ZMM22 = vmulps_avx512f(in_ZMM21,in_ZMM21);
          auVar736 = vfmadd213ps_avx512f(auVar720,in_ZMM22,auVar721);
          auVar736 = vfmadd213ps_avx512f(auVar736,in_ZMM22,auVar722);
          auVar731 = vfmadd213ps_avx512f(auVar724,in_ZMM22,auVar725);
          auVar731 = vfmadd213ps_avx512f(auVar731,in_ZMM22,auVar726);
          auVar736 = vfmadd213ps_avx512f(auVar736,in_ZMM22,auVar723);
          auVar731 = vfmadd213ps_avx512f(auVar731,in_ZMM22,auVar727);
          auVar731 = vfmadd213ps_avx512f(auVar731,in_ZMM22,auVar719);
          auVar736 = vfmadd231ps_avx512f(auVar731,in_ZMM21,auVar736);
          uVar431 = vcmpps_avx512f(auVar852,auVar1774,1);
          auVar734 = vmulps_avx512f(auVar736,auVar734);
          auVar736 = vaddps_avx512f(auVar734,auVar728);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar802._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * auVar734._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar802._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * auVar734._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar802._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * auVar734._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar802._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * auVar734._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar802._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * auVar734._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar802._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * auVar734._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar802._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * auVar734._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar802._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * auVar734._28_4_;
          bVar12 = (bool)(bVar29 & 1);
          auVar802._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * auVar734._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar802._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * auVar734._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar802._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * auVar734._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar802._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * auVar734._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar802._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * auVar734._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar802._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * auVar734._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar802._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * auVar734._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar802._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * auVar734._60_4_;
          auVar734 = vpternlogd_avx512f(auVar802,auVar733,auVar716,0xf8);
          auVar733 = vaddps_avx512f(auVar734,in_ZMM20);
          bVar12 = (bool)((byte)uVar431 & 1);
          in_ZMM19._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar734._0_4_;
          bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
          in_ZMM19._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar734._4_4_;
          bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
          in_ZMM19._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar734._8_4_;
          bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
          in_ZMM19._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar734._12_4_;
          bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
          in_ZMM19._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar734._16_4_;
          bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
          in_ZMM19._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar734._20_4_;
          bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
          in_ZMM19._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar734._24_4_;
          bVar12 = (bool)((byte)(uVar431 >> 7) & 1);
          in_ZMM19._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar734._28_4_;
          bVar12 = (bool)((byte)(uVar431 >> 8) & 1);
          in_ZMM19._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar734._32_4_;
          bVar12 = (bool)((byte)(uVar431 >> 9) & 1);
          in_ZMM19._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar734._36_4_;
          bVar12 = (bool)((byte)(uVar431 >> 10) & 1);
          in_ZMM19._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar734._40_4_;
          bVar12 = (bool)((byte)(uVar431 >> 0xb) & 1);
          in_ZMM19._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar734._44_4_;
          bVar12 = (bool)((byte)(uVar431 >> 0xc) & 1);
          in_ZMM19._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar734._48_4_;
          bVar12 = (bool)((byte)(uVar431 >> 0xd) & 1);
          in_ZMM19._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar734._52_4_;
          bVar12 = (bool)((byte)(uVar431 >> 0xe) & 1);
          in_ZMM19._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar734._56_4_;
          bVar12 = SUB81(uVar431 >> 0xf,0);
          in_ZMM19._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar734._60_4_;
          auVar734 = vpternlogd_avx512f(auVar852,auVar716,auVar729,0xea);
          uVar47 = vcmpps_avx512f(auVar734,auVar1774,1);
          auVar734 = vpternlogd_avx512f(auVar737,auVar716,auVar730,0xea);
          bVar12 = (bool)((byte)uVar429 & 1);
          bVar14 = (bool)((byte)(uVar429 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar429 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar429 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar429 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar429 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar429 >> 6) & 1);
          bVar20 = (bool)((byte)(uVar429 >> 7) & 1);
          bVar21 = (bool)((byte)(uVar429 >> 8) & 1);
          bVar22 = (bool)((byte)(uVar429 >> 9) & 1);
          bVar23 = (bool)((byte)(uVar429 >> 10) & 1);
          bVar24 = (bool)((byte)(uVar429 >> 0xb) & 1);
          bVar25 = (bool)((byte)(uVar429 >> 0xc) & 1);
          bVar26 = (bool)((byte)(uVar429 >> 0xd) & 1);
          bVar27 = (bool)((byte)(uVar429 >> 0xe) & 1);
          bVar28 = SUB81(uVar429 >> 0xf,0);
          bVar13 = (bool)((byte)uVar430 & 1);
          auVar803._0_4_ =
               (uint)bVar13 * (bVar12 * in_ZMM19._0_4_ | (uint)!bVar12 * auVar734._0_4_) |
               (uint)!bVar13 * (uint)((byte)uVar47 & 1) * auVar717._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar803._4_4_ =
               (uint)bVar12 * (bVar14 * in_ZMM19._4_4_ | (uint)!bVar14 * auVar734._4_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 1) & 1) * auVar717._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar803._8_4_ =
               (uint)bVar12 * (bVar15 * in_ZMM19._8_4_ | (uint)!bVar15 * auVar734._8_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 2) & 1) * auVar717._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar803._12_4_ =
               (uint)bVar12 * (bVar16 * in_ZMM19._12_4_ | (uint)!bVar16 * auVar734._12_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 3) & 1) * auVar717._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar803._16_4_ =
               (uint)bVar12 * (bVar17 * in_ZMM19._16_4_ | (uint)!bVar17 * auVar734._16_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 4) & 1) * auVar717._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar803._20_4_ =
               (uint)bVar12 * (bVar18 * in_ZMM19._20_4_ | (uint)!bVar18 * auVar734._20_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 5) & 1) * auVar717._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar803._24_4_ =
               (uint)bVar12 * (bVar19 * in_ZMM19._24_4_ | (uint)!bVar19 * auVar734._24_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 6) & 1) * auVar717._24_4_;
          bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
          auVar803._28_4_ =
               (uint)bVar12 * (bVar20 * in_ZMM19._28_4_ | (uint)!bVar20 * auVar734._28_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 7) & 1) * auVar717._28_4_;
          bVar12 = (bool)((byte)(uVar430 >> 8) & 1);
          auVar803._32_4_ =
               (uint)bVar12 * (bVar21 * in_ZMM19._32_4_ | (uint)!bVar21 * auVar734._32_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 8) & 1) * auVar717._32_4_;
          bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
          auVar803._36_4_ =
               (uint)bVar12 * (bVar22 * in_ZMM19._36_4_ | (uint)!bVar22 * auVar734._36_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 9) & 1) * auVar717._36_4_;
          bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
          auVar803._40_4_ =
               (uint)bVar12 * (bVar23 * in_ZMM19._40_4_ | (uint)!bVar23 * auVar734._40_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 10) & 1) * auVar717._40_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
          auVar803._44_4_ =
               (uint)bVar12 * (bVar24 * in_ZMM19._44_4_ | (uint)!bVar24 * auVar734._44_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xb) & 1) * auVar717._44_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
          auVar803._48_4_ =
               (uint)bVar12 * (bVar25 * in_ZMM19._48_4_ | (uint)!bVar25 * auVar734._48_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xc) & 1) * auVar717._48_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
          auVar803._52_4_ =
               (uint)bVar12 * (bVar26 * in_ZMM19._52_4_ | (uint)!bVar26 * auVar734._52_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xd) & 1) * auVar717._52_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
          auVar803._56_4_ =
               (uint)bVar12 * (bVar27 * in_ZMM19._56_4_ | (uint)!bVar27 * auVar734._56_4_) |
               (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xe) & 1) * auVar717._56_4_;
          bVar12 = SUB81(uVar430 >> 0xf,0);
          auVar803._60_4_ =
               (uint)bVar12 * (bVar28 * in_ZMM19._60_4_ | (uint)!bVar28 * auVar734._60_4_) |
               (uint)!bVar12 * (uint)(byte)(uVar47 >> 0xf) * auVar717._60_4_;
          ptr = (float *)((long)ptr + 0x40);
          *(undefined1 (*) [64])outptr = auVar803;
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 4;
          auVar734 = in_ZMM20;
        } while (iVar424 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffc;
      }
      if ((int)(uVar427 | 1) < (int)uVar425) {
        auVar442 = ZEXT816(0) << 0x40;
        auVar1002._8_4_ = 0x80000000;
        auVar1002._0_8_ = 0x8000000080000000;
        auVar1002._12_4_ = 0x80000000;
        auVar1002._16_4_ = 0x80000000;
        auVar1002._20_4_ = 0x80000000;
        auVar1002._24_4_ = 0x80000000;
        auVar1002._28_4_ = 0x80000000;
        auVar1063._8_4_ = 0x40490fdb;
        auVar1063._0_8_ = 0x40490fdb40490fdb;
        auVar1063._12_4_ = 0x40490fdb;
        auVar1063._16_4_ = 0x40490fdb;
        auVar1063._20_4_ = 0x40490fdb;
        auVar1063._24_4_ = 0x40490fdb;
        auVar1063._28_4_ = 0x40490fdb;
        auVar1142._8_4_ = 0x7fffffff;
        auVar1142._0_8_ = 0x7fffffff7fffffff;
        auVar1142._12_4_ = 0x7fffffff;
        auVar1142._16_4_ = 0x7fffffff;
        auVar1142._20_4_ = 0x7fffffff;
        auVar1142._24_4_ = 0x7fffffff;
        auVar1142._28_4_ = 0x7fffffff;
        auVar1203._8_4_ = 0x3f800000;
        auVar1203._0_8_ = 0x3f8000003f800000;
        auVar1203._12_4_ = 0x3f800000;
        auVar1203._16_4_ = 0x3f800000;
        auVar1203._20_4_ = 0x3f800000;
        auVar1203._24_4_ = 0x3f800000;
        auVar1203._28_4_ = 0x3f800000;
        auVar1260._8_4_ = 0xbc83a25c;
        auVar1260._0_8_ = 0xbc83a25cbc83a25c;
        auVar1260._12_4_ = 0xbc83a25c;
        auVar1260._16_4_ = 0xbc83a25c;
        auVar1260._20_4_ = 0xbc83a25c;
        auVar1260._24_4_ = 0xbc83a25c;
        auVar1260._28_4_ = 0xbc83a25c;
        auVar1322._8_4_ = 0xbd99b01e;
        auVar1322._0_8_ = 0xbd99b01ebd99b01e;
        auVar1322._12_4_ = 0xbd99b01e;
        auVar1322._16_4_ = 0xbd99b01e;
        auVar1322._20_4_ = 0xbd99b01e;
        auVar1322._24_4_ = 0xbd99b01e;
        auVar1322._28_4_ = 0xbd99b01e;
        auVar1380._8_4_ = 0xbe117200;
        auVar1380._0_8_ = 0xbe117200be117200;
        auVar1380._12_4_ = 0xbe117200;
        auVar1380._16_4_ = 0xbe117200;
        auVar1380._20_4_ = 0xbe117200;
        auVar1380._24_4_ = 0xbe117200;
        auVar1380._28_4_ = 0xbe117200;
        auVar1436._8_4_ = 0xbeaaaa53;
        auVar1436._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1436._12_4_ = 0xbeaaaa53;
        auVar1436._16_4_ = 0xbeaaaa53;
        auVar1436._20_4_ = 0xbeaaaa53;
        auVar1436._24_4_ = 0xbeaaaa53;
        auVar1436._28_4_ = 0xbeaaaa53;
        auVar1490._8_4_ = 0x3b3ac537;
        auVar1490._0_8_ = 0x3b3ac5373b3ac537;
        auVar1490._12_4_ = 0x3b3ac537;
        auVar1490._16_4_ = 0x3b3ac537;
        auVar1490._20_4_ = 0x3b3ac537;
        auVar1490._24_4_ = 0x3b3ac537;
        auVar1490._28_4_ = 0x3b3ac537;
        auVar1544._8_4_ = 0x3d2edd4e;
        auVar1544._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1544._12_4_ = 0x3d2edd4e;
        auVar1544._16_4_ = 0x3d2edd4e;
        auVar1544._20_4_ = 0x3d2edd4e;
        auVar1544._24_4_ = 0x3d2edd4e;
        auVar1544._28_4_ = 0x3d2edd4e;
        auVar1598._8_4_ = 0x3dd9ed24;
        auVar1598._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1598._12_4_ = 0x3dd9ed24;
        auVar1598._16_4_ = 0x3dd9ed24;
        auVar1598._20_4_ = 0x3dd9ed24;
        auVar1598._24_4_ = 0x3dd9ed24;
        auVar1598._28_4_ = 0x3dd9ed24;
        auVar1652._8_4_ = 0x3e4cb974;
        auVar1652._0_8_ = 0x3e4cb9743e4cb974;
        auVar1652._12_4_ = 0x3e4cb974;
        auVar1652._16_4_ = 0x3e4cb974;
        auVar1652._20_4_ = 0x3e4cb974;
        auVar1652._24_4_ = 0x3e4cb974;
        auVar1652._28_4_ = 0x3e4cb974;
        auVar1706._8_4_ = 0x3fc90fdb;
        auVar1706._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1706._12_4_ = 0x3fc90fdb;
        auVar1706._16_4_ = 0x3fc90fdb;
        auVar1706._20_4_ = 0x3fc90fdb;
        auVar1706._24_4_ = 0x3fc90fdb;
        auVar1706._28_4_ = 0x3fc90fdb;
        auVar1757._8_4_ = 0x40490fdb;
        auVar1757._0_8_ = 0x40490fdb40490fdb;
        auVar1757._12_4_ = 0x40490fdb;
        auVar1757._16_4_ = 0x40490fdb;
        auVar1757._20_4_ = 0x40490fdb;
        auVar1757._24_4_ = 0x40490fdb;
        auVar1757._28_4_ = 0x40490fdb;
        auVar1808._8_4_ = 0x3fc90fdb;
        auVar1808._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1808._12_4_ = 0x3fc90fdb;
        auVar1808._16_4_ = 0x3fc90fdb;
        auVar1808._20_4_ = 0x3fc90fdb;
        auVar1808._24_4_ = 0x3fc90fdb;
        auVar1808._28_4_ = 0x3fc90fdb;
        uVar882 = uVar427;
        do {
          auVar460 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          auVar674 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
          auVar461 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
          auVar677 = vinsertf32x4_avx512vl(ZEXT1632(auVar460),auVar461,1);
          auVar678 = vdivps_avx512vl(auVar674,auVar677);
          uVar47 = vcmpps_avx512vl(auVar674,ZEXT1632(auVar442),1);
          vandps_avx512vl(auVar678,auVar1142);
          auVar192._8_4_ = 0xc0490fdb;
          auVar192._0_8_ = 0xc0490fdbc0490fdb;
          auVar192._12_4_ = 0xc0490fdb;
          auVar192._16_4_ = 0xc0490fdb;
          auVar192._20_4_ = 0xc0490fdb;
          auVar192._24_4_ = 0xc0490fdb;
          auVar192._28_4_ = 0xc0490fdb;
          auVar562 = vblendmps_avx512vl(auVar1063,auVar192);
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar625._0_4_ = (uint)bVar12 * auVar562._0_4_ | (uint)!bVar12 * in_ZMM20._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar625._4_4_ = (uint)bVar12 * auVar562._4_4_ | (uint)!bVar12 * in_ZMM20._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar625._8_4_ = (uint)bVar12 * auVar562._8_4_ | (uint)!bVar12 * in_ZMM20._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar625._12_4_ = (uint)bVar12 * auVar562._12_4_ | (uint)!bVar12 * in_ZMM20._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar625._16_4_ = (uint)bVar12 * auVar562._16_4_ | (uint)!bVar12 * in_ZMM20._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar625._20_4_ = (uint)bVar12 * auVar562._20_4_ | (uint)!bVar12 * in_ZMM20._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar625._24_4_ = (uint)bVar12 * auVar562._24_4_ | (uint)!bVar12 * in_ZMM20._24_4_;
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar625._28_4_ = (uint)bVar12 * auVar562._28_4_ | (uint)!bVar12 * in_ZMM20._28_4_;
          in_ZMM20 = ZEXT3264(auVar625);
          uVar47 = vcmpps_avx512vl(auVar1203,auVar678,1);
          auVar193._8_4_ = 0xbf800000;
          auVar193._0_8_ = 0xbf800000bf800000;
          auVar193._12_4_ = 0xbf800000;
          auVar193._16_4_ = 0xbf800000;
          auVar193._20_4_ = 0xbf800000;
          auVar193._24_4_ = 0xbf800000;
          auVar193._28_4_ = 0xbf800000;
          auVar562 = vblendmps_avx512vl(auVar678,auVar193);
          bVar29 = (byte)uVar47;
          auVar626._0_4_ =
               (uint)(bVar29 & 1) * auVar562._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM21._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar626._4_4_ = (uint)bVar12 * auVar562._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar626._8_4_ = (uint)bVar12 * auVar562._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar626._12_4_ = (uint)bVar12 * auVar562._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar626._16_4_ = (uint)bVar12 * auVar562._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar626._20_4_ = (uint)bVar12 * auVar562._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar626._24_4_ = (uint)bVar12 * auVar562._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar626._28_4_ = (uint)bVar12 * auVar562._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
          auVar562 = vdivps_avx512vl(auVar626,auVar678);
          auVar627._0_4_ =
               (uint)(bVar29 & 1) * auVar562._0_4_ | !(bool)(bVar29 & 1) * auVar626._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar627._4_4_ = (uint)bVar12 * auVar562._4_4_ | !bVar12 * auVar626._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar627._8_4_ = (uint)bVar12 * auVar562._8_4_ | !bVar12 * auVar626._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar627._12_4_ = (uint)bVar12 * auVar562._12_4_ | !bVar12 * auVar626._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar627._16_4_ = (uint)bVar12 * auVar562._16_4_ | !bVar12 * auVar626._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar627._20_4_ = (uint)bVar12 * auVar562._20_4_ | !bVar12 * auVar626._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar627._24_4_ = (uint)bVar12 * auVar562._24_4_ | !bVar12 * auVar626._24_4_;
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar627._28_4_ = (uint)bVar12 * auVar562._28_4_ | !bVar12 * auVar626._28_4_;
          in_ZMM21 = ZEXT3264(auVar627);
          uVar430 = vcmpps_avx512vl(auVar674,ZEXT1632(auVar442),4);
          auVar562 = vmulps_avx512vl(auVar627,auVar627);
          auVar684 = ZEXT1632(auVar442);
          uVar429 = vcmpps_avx512vl(auVar677,auVar684,1);
          auVar679 = vmulps_avx512vl(auVar562,auVar562);
          in_ZMM22 = ZEXT3264(auVar679);
          auVar680 = vfmadd213ps_avx512vl(auVar1260,auVar679,auVar1322);
          auVar680 = vfmadd213ps_avx512vl(auVar680,auVar679,auVar1380);
          auVar683 = vfmadd213ps_avx512vl(auVar1490,auVar679,auVar1544);
          auVar683 = vfmadd213ps_avx512vl(auVar683,auVar679,auVar1598);
          auVar680 = vfmadd213ps_avx512vl(auVar680,auVar679,auVar1436);
          auVar683 = vfmadd213ps_avx512vl(auVar683,auVar679,auVar1652);
          auVar679 = vfmadd213ps_avx512vl(auVar683,auVar679,auVar1203);
          auVar562 = vfmadd231ps_avx512vl(auVar679,auVar562,auVar680);
          uVar431 = vcmpps_avx512vl(auVar677,auVar684,4);
          uVar431 = uVar430 & uVar431;
          auVar562 = vmulps_avx512vl(auVar562,auVar627);
          auVar679 = vaddps_avx512vl(auVar562,auVar1706);
          auVar628._0_4_ =
               (uint)(bVar29 & 1) * auVar679._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar562._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar628._4_4_ = (uint)bVar12 * auVar679._4_4_ | (uint)!bVar12 * auVar562._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar628._8_4_ = (uint)bVar12 * auVar679._8_4_ | (uint)!bVar12 * auVar562._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar628._12_4_ = (uint)bVar12 * auVar679._12_4_ | (uint)!bVar12 * auVar562._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar628._16_4_ = (uint)bVar12 * auVar679._16_4_ | (uint)!bVar12 * auVar562._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar628._20_4_ = (uint)bVar12 * auVar679._20_4_ | (uint)!bVar12 * auVar562._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar628._24_4_ = (uint)bVar12 * auVar679._24_4_ | (uint)!bVar12 * auVar562._24_4_;
          bVar12 = SUB81(uVar47 >> 7,0);
          auVar628._28_4_ = (uint)bVar12 * auVar679._28_4_ | (uint)!bVar12 * auVar562._28_4_;
          auVar677 = vpternlogd_avx512vl(auVar677,auVar1757,auVar1002,0xec);
          auVar678 = vpternlogd_avx512vl(auVar628,auVar678,auVar1002,0xf8);
          uVar46 = vcmpps_avx512vl(auVar684,auVar677,2);
          bVar29 = ~((byte)uVar430 | (byte)uVar46);
          auVar677 = vaddps_avx512vl(auVar678,auVar625);
          bVar12 = (bool)((byte)uVar429 & 1);
          uVar427 = (uint)bVar12 * auVar677._0_4_ | (uint)!bVar12 * auVar678._0_4_;
          bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
          uVar883 = (uint)bVar12 * auVar677._4_4_ | (uint)!bVar12 * auVar678._4_4_;
          bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
          uVar884 = (uint)bVar12 * auVar677._8_4_ | (uint)!bVar12 * auVar678._8_4_;
          bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
          uVar885 = (uint)bVar12 * auVar677._12_4_ | (uint)!bVar12 * auVar678._12_4_;
          bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
          uVar886 = (uint)bVar12 * auVar677._16_4_ | (uint)!bVar12 * auVar678._16_4_;
          bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
          uVar887 = (uint)bVar12 * auVar677._20_4_ | (uint)!bVar12 * auVar678._20_4_;
          bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
          uVar888 = (uint)bVar12 * auVar677._24_4_ | (uint)!bVar12 * auVar678._24_4_;
          bVar12 = SUB81(uVar429 >> 7,0);
          uVar889 = (uint)bVar12 * auVar677._28_4_ | (uint)!bVar12 * auVar678._28_4_;
          in_ZMM19 = ZEXT3264(CONCAT428(uVar889,CONCAT424(uVar888,CONCAT420(uVar887,CONCAT416(
                                                  uVar886,CONCAT412(uVar885,CONCAT48(uVar884,
                                                  CONCAT44(uVar883,uVar427))))))));
          auVar677 = vmovdqa32_avx512vl(auVar1757);
          iVar2 = (uint)(bVar29 & 1) * auVar677._0_4_;
          iVar3 = (uint)(bVar29 >> 1 & 1) * auVar677._4_4_;
          auVar629._4_4_ = iVar3;
          auVar629._0_4_ = iVar2;
          iVar6 = (uint)(bVar29 >> 2 & 1) * auVar677._8_4_;
          auVar629._8_4_ = iVar6;
          iVar5 = (uint)(bVar29 >> 3 & 1) * auVar677._12_4_;
          auVar629._12_4_ = iVar5;
          iVar4 = (uint)(bVar29 >> 4 & 1) * auVar677._16_4_;
          auVar629._16_4_ = iVar4;
          iVar426 = (uint)(bVar29 >> 5 & 1) * auVar677._20_4_;
          auVar629._20_4_ = iVar426;
          iVar424 = (uint)(bVar29 >> 6 & 1) * auVar677._24_4_;
          auVar629._24_4_ = iVar424;
          iVar1 = (uint)(bVar29 >> 7) * auVar677._28_4_;
          auVar629._28_4_ = iVar1;
          auVar674 = vpternlogd_avx512vl(auVar674,auVar629,auVar1002,0xec);
          auVar674 = vpord_avx512vl(auVar674,auVar1808);
          bVar12 = (bool)((byte)uVar430 & 1);
          bVar14 = (bool)((byte)(uVar430 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar430 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar430 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar430 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar430 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar430 >> 6) & 1);
          bVar20 = SUB81(uVar430 >> 7,0);
          bVar13 = (bool)((byte)uVar431 & 1);
          auVar630._0_4_ =
               bVar13 * uVar427 |
               (uint)!bVar13 * ((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * iVar2);
          bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
          auVar630._4_4_ =
               bVar12 * uVar883 |
               (uint)!bVar12 * ((uint)bVar14 * auVar674._4_4_ | (uint)!bVar14 * iVar3);
          bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
          auVar630._8_4_ =
               bVar12 * uVar884 |
               (uint)!bVar12 * ((uint)bVar15 * auVar674._8_4_ | (uint)!bVar15 * iVar6);
          bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
          auVar630._12_4_ =
               bVar12 * uVar885 |
               (uint)!bVar12 * ((uint)bVar16 * auVar674._12_4_ | (uint)!bVar16 * iVar5);
          bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
          auVar630._16_4_ =
               bVar12 * uVar886 |
               (uint)!bVar12 * ((uint)bVar17 * auVar674._16_4_ | (uint)!bVar17 * iVar4);
          bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
          auVar630._20_4_ =
               bVar12 * uVar887 |
               (uint)!bVar12 * ((uint)bVar18 * auVar674._20_4_ | (uint)!bVar18 * iVar426);
          bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
          auVar630._24_4_ =
               bVar12 * uVar888 |
               (uint)!bVar12 * ((uint)bVar19 * auVar674._24_4_ | (uint)!bVar19 * iVar424);
          bVar12 = SUB81(uVar431 >> 7,0);
          auVar630._28_4_ =
               bVar12 * uVar889 |
               (uint)!bVar12 * ((uint)bVar20 * auVar674._28_4_ | (uint)!bVar20 * iVar1);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar630;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar427 = uVar882 + 2;
          iVar424 = uVar882 + 3;
          uVar882 = uVar427;
        } while (iVar424 < (int)uVar425);
      }
      iVar424 = uVar425 - uVar427;
      if (iVar424 == 0 || (int)uVar425 < (int)uVar427) {
        return;
      }
      lVar428 = 0;
      auVar902._8_4_ = 0x80000000;
      auVar902._0_8_ = 0x8000000080000000;
      auVar902._12_4_ = 0x80000000;
      auVar960._8_4_ = 0x40490fdb;
      auVar960._0_8_ = 0x40490fdb40490fdb;
      auVar960._12_4_ = 0x40490fdb;
      auVar460 = ZEXT816(0) << 0x40;
      auVar1179._8_4_ = 0x7fffffff;
      auVar1179._0_8_ = 0x7fffffff7fffffff;
      auVar1179._12_4_ = 0x7fffffff;
      auVar1231._8_4_ = 0x3f800000;
      auVar1231._0_8_ = 0x3f8000003f800000;
      auVar1231._12_4_ = 0x3f800000;
      auVar1296._8_4_ = 0xbc83a25c;
      auVar1296._0_8_ = 0xbc83a25cbc83a25c;
      auVar1296._12_4_ = 0xbc83a25c;
      auVar1357._8_4_ = 0xbd99b01e;
      auVar1357._0_8_ = 0xbd99b01ebd99b01e;
      auVar1357._12_4_ = 0xbd99b01e;
      auVar1413._8_4_ = 0xbe117200;
      auVar1413._0_8_ = 0xbe117200be117200;
      auVar1413._12_4_ = 0xbe117200;
      auVar1467._8_4_ = 0xbeaaaa53;
      auVar1467._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1467._12_4_ = 0xbeaaaa53;
      auVar1521._8_4_ = 0x3b3ac537;
      auVar1521._0_8_ = 0x3b3ac5373b3ac537;
      auVar1521._12_4_ = 0x3b3ac537;
      auVar1575._8_4_ = 0x3d2edd4e;
      auVar1575._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1575._12_4_ = 0x3d2edd4e;
      auVar1629._8_4_ = 0x3dd9ed24;
      auVar1629._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1629._12_4_ = 0x3dd9ed24;
      auVar1683._8_4_ = 0x3e4cb974;
      auVar1683._0_8_ = 0x3e4cb9743e4cb974;
      auVar1683._12_4_ = 0x3e4cb974;
      auVar1737._8_4_ = 0x3fc90fdb;
      auVar1737._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar1737._12_4_ = 0x3fc90fdb;
      auVar1788._8_4_ = 0x40490fdb;
      auVar1788._0_8_ = 0x40490fdb40490fdb;
      auVar1788._12_4_ = 0x40490fdb;
      auVar442 = vpbroadcastd_avx512vl(ZEXT416(0x3fc90fdb));
      do {
        auVar519 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)ptr1 + lVar428)));
        auVar461 = *(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar428 * 4);
        uVar47 = vcmpps_avx512vl(auVar461,auVar460,4);
        uVar430 = vcmpps_avx512vl(auVar519,auVar460,4);
        uVar430 = uVar47 & uVar430;
        uVar429 = vcmpps_avx512vl(auVar519,auVar460,1);
        uVar431 = vcmpps_avx512vl(auVar461,auVar460,1);
        auVar66._8_4_ = 0xc0490fdb;
        auVar66._0_8_ = 0xc0490fdbc0490fdb;
        auVar66._12_4_ = 0xc0490fdb;
        auVar472 = vblendmps_avx512vl(auVar960,auVar66);
        bVar12 = (bool)((byte)uVar431 & 1);
        auVar508._0_4_ = (uint)bVar12 * auVar472._0_4_ | (uint)!bVar12 * in_ZMM19._0_4_;
        bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
        auVar508._4_4_ = (uint)bVar12 * auVar472._4_4_ | (uint)!bVar12 * in_ZMM19._4_4_;
        bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
        auVar508._8_4_ = (uint)bVar12 * auVar472._8_4_ | (uint)!bVar12 * in_ZMM19._8_4_;
        bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
        auVar508._12_4_ = (uint)bVar12 * auVar472._12_4_ | (uint)!bVar12 * in_ZMM19._12_4_;
        in_ZMM19 = ZEXT1664(auVar508);
        auVar472 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar519);
        auVar472 = vbroadcastss_avx512vl(auVar472);
        auVar472 = vmulps_avx512vl(auVar461,auVar472);
        auVar464 = vandps_avx512vl(auVar472,auVar1179);
        uVar431 = vcmpps_avx512vl(auVar1231,auVar464,1);
        auVar67._8_4_ = 0xbf800000;
        auVar67._0_8_ = 0xbf800000bf800000;
        auVar67._12_4_ = 0xbf800000;
        auVar465 = vblendmps_avx512vl(auVar464,auVar67);
        bVar29 = (byte)uVar431;
        auVar509._0_4_ =
             (uint)(bVar29 & 1) * auVar465._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM22._0_4_;
        bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
        auVar509._4_4_ = (uint)bVar12 * auVar465._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
        bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
        auVar509._8_4_ = (uint)bVar12 * auVar465._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
        bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
        auVar509._12_4_ = (uint)bVar12 * auVar465._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
        auVar464 = vdivps_avx512vl(auVar509,auVar464);
        auVar510._0_4_ = (uint)(bVar29 & 1) * auVar464._0_4_ | !(bool)(bVar29 & 1) * auVar509._0_4_;
        bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
        auVar510._4_4_ = (uint)bVar12 * auVar464._4_4_ | !bVar12 * auVar509._4_4_;
        bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
        auVar510._8_4_ = (uint)bVar12 * auVar464._8_4_ | !bVar12 * auVar509._8_4_;
        bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
        auVar510._12_4_ = (uint)bVar12 * auVar464._12_4_ | !bVar12 * auVar509._12_4_;
        in_ZMM22 = ZEXT1664(auVar510);
        auVar464 = vmulps_avx512vl(auVar510,auVar510);
        auVar465 = vmulps_avx512vl(auVar464,auVar464);
        auVar466 = vfmadd213ps_avx512vl(auVar1296,auVar465,auVar1357);
        auVar466 = vfmadd213ps_avx512vl(auVar466,auVar465,auVar1413);
        auVar466 = vfmadd213ps_avx512vl(auVar466,auVar465,auVar1467);
        auVar469 = vfmadd213ps_avx512vl(auVar1521,auVar465,auVar1575);
        auVar469 = vfmadd213ps_avx512vl(auVar469,auVar465,auVar1629);
        auVar469 = vfmadd213ps_avx512vl(auVar469,auVar465,auVar1683);
        auVar465 = vfmadd213ps_avx512vl(auVar469,auVar465,auVar1231);
        auVar464 = vfmadd231ps_avx512vl(auVar465,auVar464,auVar466);
        auVar464 = vmulps_avx512vl(auVar464,auVar510);
        auVar465 = vaddps_avx512vl(auVar464,auVar1737);
        auVar511._0_4_ =
             (uint)(bVar29 & 1) * auVar465._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar464._0_4_;
        bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
        auVar511._4_4_ = (uint)bVar12 * auVar465._4_4_ | (uint)!bVar12 * auVar464._4_4_;
        bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
        auVar511._8_4_ = (uint)bVar12 * auVar465._8_4_ | (uint)!bVar12 * auVar464._8_4_;
        bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
        auVar511._12_4_ = (uint)bVar12 * auVar465._12_4_ | (uint)!bVar12 * auVar464._12_4_;
        auVar472 = vpternlogd_avx512vl(auVar511,auVar472,auVar902,0xf8);
        auVar464 = vaddps_avx512vl(auVar472,auVar508);
        bVar12 = (bool)((byte)uVar429 & 1);
        bVar15 = (bool)((byte)(uVar429 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar429 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar429 >> 3) & 1);
        auVar519 = vpternlogd_avx512vl(auVar519,auVar1788,auVar902,0xec);
        uVar46 = vcmpps_avx512vl(auVar460,auVar519,2);
        uVar48 = ~((ushort)uVar47 | (ushort)uVar46);
        auVar519 = vmovdqa32_avx512vl(auVar1788);
        iVar426 = (uint)((byte)uVar48 & 1) * auVar519._0_4_;
        iVar1 = (uint)((byte)(uVar48 >> 1) & 1) * auVar519._4_4_;
        auVar512._4_4_ = iVar1;
        auVar512._0_4_ = iVar426;
        iVar3 = (uint)((byte)(uVar48 >> 2) & 1) * auVar519._8_4_;
        auVar512._8_4_ = iVar3;
        iVar2 = (uint)((byte)(uVar48 >> 3) & 1) * auVar519._12_4_;
        auVar512._12_4_ = iVar2;
        auVar461 = vpternlogd_avx512vl(auVar461,auVar512,auVar902,0xec);
        auVar461 = vpord_avx512vl(auVar461,auVar442);
        bVar13 = (bool)((byte)uVar47 & 1);
        bVar16 = (bool)((byte)(uVar47 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar47 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar47 >> 3) & 1);
        bVar14 = (bool)((byte)uVar430 & 1);
        bVar17 = (bool)((byte)(uVar430 >> 1) & 1);
        bVar20 = (bool)((byte)(uVar430 >> 2) & 1);
        bVar23 = (bool)((byte)(uVar430 >> 3) & 1);
        pfVar9 = (float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4);
        *pfVar9 = (float)((uint)bVar14 *
                          ((uint)bVar12 * auVar464._0_4_ | (uint)!bVar12 * auVar472._0_4_) |
                         (uint)!bVar14 * ((uint)bVar13 * auVar461._0_4_ | (uint)!bVar13 * iVar426));
        pfVar9[1] = (float)((uint)bVar17 *
                            ((uint)bVar15 * auVar464._4_4_ | (uint)!bVar15 * auVar472._4_4_) |
                           (uint)!bVar17 * ((uint)bVar16 * auVar461._4_4_ | (uint)!bVar16 * iVar1));
        pfVar9[2] = (float)((uint)bVar20 *
                            ((uint)bVar18 * auVar464._8_4_ | (uint)!bVar18 * auVar472._8_4_) |
                           (uint)!bVar20 * ((uint)bVar19 * auVar461._8_4_ | (uint)!bVar19 * iVar3));
        pfVar9[3] = (float)((uint)bVar23 *
                            ((uint)bVar21 * auVar464._12_4_ | (uint)!bVar21 * auVar472._12_4_) |
                           (uint)!bVar23 * ((uint)bVar22 * auVar461._12_4_ | (uint)!bVar22 * iVar2))
        ;
        lVar428 = lVar428 + 4;
        iVar424 = iVar424 + -1;
      } while (iVar424 != 0);
      return;
    }
    if (bw == 1) {
      uVar425 = 0;
      if (0xf < (int)uVar427) {
        auVar734 = vpbroadcastd_avx512f(ZEXT416((uint)*ptr1));
        auVar716 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        auVar349._8_4_ = 0x80000000;
        auVar349._0_8_ = 0x8000000080000000;
        auVar349._12_4_ = 0x80000000;
        auVar349._16_4_ = 0x80000000;
        auVar349._20_4_ = 0x80000000;
        auVar349._24_4_ = 0x80000000;
        auVar349._28_4_ = 0x80000000;
        auVar349._32_4_ = 0x80000000;
        auVar349._36_4_ = 0x80000000;
        auVar349._40_4_ = 0x80000000;
        auVar349._44_4_ = 0x80000000;
        auVar349._48_4_ = 0x80000000;
        auVar349._52_4_ = 0x80000000;
        auVar349._56_4_ = 0x80000000;
        auVar349._60_4_ = 0x80000000;
        auVar716 = vpternlogd_avx512f(auVar716,auVar734,auVar349,0xf8);
        auVar730 = ZEXT864(0);
        uVar47 = vcmpps_avx512f(auVar716,auVar730,1);
        auVar716 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar804._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar716._4_4_;
        auVar804._0_4_ = (uint)((byte)uVar47 & 1) * auVar716._0_4_;
        auVar804._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar716._8_4_;
        auVar804._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar716._12_4_;
        auVar804._16_4_ = (uint)((byte)(uVar47 >> 4) & 1) * auVar716._16_4_;
        auVar804._20_4_ = (uint)((byte)(uVar47 >> 5) & 1) * auVar716._20_4_;
        auVar804._24_4_ = (uint)((byte)(uVar47 >> 6) & 1) * auVar716._24_4_;
        auVar804._28_4_ = (uint)((byte)(uVar47 >> 7) & 1) * auVar716._28_4_;
        auVar804._32_4_ = (uint)((byte)(uVar47 >> 8) & 1) * auVar716._32_4_;
        auVar804._36_4_ = (uint)((byte)(uVar47 >> 9) & 1) * auVar716._36_4_;
        auVar804._40_4_ = (uint)((byte)(uVar47 >> 10) & 1) * auVar716._40_4_;
        auVar804._44_4_ = (uint)((byte)(uVar47 >> 0xb) & 1) * auVar716._44_4_;
        auVar804._48_4_ = (uint)((byte)(uVar47 >> 0xc) & 1) * auVar716._48_4_;
        auVar804._52_4_ = (uint)((byte)(uVar47 >> 0xd) & 1) * auVar716._52_4_;
        auVar804._56_4_ = (uint)((byte)(uVar47 >> 0xe) & 1) * auVar716._56_4_;
        auVar804._60_4_ = (uint)(byte)(uVar47 >> 0xf) * auVar716._60_4_;
        auVar442 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar734._0_16_);
        auVar716 = vbroadcastss_avx512f(auVar442);
        iVar424 = 0xf;
        uVar47 = vcmpps_avx512f(auVar734,auVar730,1);
        auVar717 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar718 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar719 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar720 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar721 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar722 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar723 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar724 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar725 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar726 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar727 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar728 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar729 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        uVar430 = vcmpps_avx512f(auVar734,auVar730,4);
        auVar734 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        do {
          auVar1774 = *(undefined1 (*) [64])ptr;
          auVar737 = vmulps_avx512f(auVar1774,auVar716);
          uVar429 = vcmpps_avx512f(auVar1774,auVar730,1);
          auVar852 = vandps_avx512dq(auVar737,auVar719);
          auVar350._8_4_ = 0xc0490fdb;
          auVar350._0_8_ = 0xc0490fdbc0490fdb;
          auVar350._12_4_ = 0xc0490fdb;
          auVar350._16_4_ = 0xc0490fdb;
          auVar350._20_4_ = 0xc0490fdb;
          auVar350._24_4_ = 0xc0490fdb;
          auVar350._28_4_ = 0xc0490fdb;
          auVar350._32_4_ = 0xc0490fdb;
          auVar350._36_4_ = 0xc0490fdb;
          auVar350._40_4_ = 0xc0490fdb;
          auVar350._44_4_ = 0xc0490fdb;
          auVar350._48_4_ = 0xc0490fdb;
          auVar350._52_4_ = 0xc0490fdb;
          auVar350._56_4_ = 0xc0490fdb;
          auVar350._60_4_ = 0xc0490fdb;
          auVar733 = vblendmps_avx512f(auVar718,auVar350);
          bVar12 = (bool)((byte)uVar429 & 1);
          auVar805._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * in_ZMM20._0_4_;
          bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
          auVar805._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * in_ZMM20._4_4_;
          bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
          auVar805._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * in_ZMM20._8_4_;
          bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
          auVar805._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * in_ZMM20._12_4_;
          bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
          auVar805._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * in_ZMM20._16_4_;
          bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
          auVar805._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * in_ZMM20._20_4_;
          bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
          auVar805._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * in_ZMM20._24_4_;
          bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
          auVar805._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * in_ZMM20._28_4_;
          bVar12 = (bool)((byte)(uVar429 >> 8) & 1);
          auVar805._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * in_ZMM20._32_4_;
          bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
          auVar805._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * in_ZMM20._36_4_;
          bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
          auVar805._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * in_ZMM20._40_4_;
          bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
          auVar805._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * in_ZMM20._44_4_;
          bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
          auVar805._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * in_ZMM20._48_4_;
          bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
          auVar805._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * in_ZMM20._52_4_;
          bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
          auVar805._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * in_ZMM20._56_4_;
          bVar12 = SUB81(uVar429 >> 0xf,0);
          auVar805._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * in_ZMM20._60_4_;
          uVar429 = vcmpps_avx512f(auVar720,auVar852,1);
          auVar351._8_4_ = 0xbf800000;
          auVar351._0_8_ = 0xbf800000bf800000;
          auVar351._12_4_ = 0xbf800000;
          auVar351._16_4_ = 0xbf800000;
          auVar351._20_4_ = 0xbf800000;
          auVar351._24_4_ = 0xbf800000;
          auVar351._28_4_ = 0xbf800000;
          auVar351._32_4_ = 0xbf800000;
          auVar351._36_4_ = 0xbf800000;
          auVar351._40_4_ = 0xbf800000;
          auVar351._44_4_ = 0xbf800000;
          auVar351._48_4_ = 0xbf800000;
          auVar351._52_4_ = 0xbf800000;
          auVar351._56_4_ = 0xbf800000;
          auVar351._60_4_ = 0xbf800000;
          auVar733 = vblendmps_avx512f(auVar852,auVar351);
          bVar12 = (bool)((byte)uVar429 & 1);
          auVar806._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * in_ZMM21._0_4_;
          bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
          auVar806._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
          bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
          auVar806._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
          bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
          auVar806._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
          bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
          auVar806._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
          bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
          auVar806._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
          bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
          auVar806._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
          bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
          auVar806._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
          bVar29 = (byte)(uVar429 >> 8);
          bVar12 = (bool)(bVar29 & 1);
          auVar806._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * in_ZMM21._32_4_;
          bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
          auVar806._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * in_ZMM21._36_4_;
          bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
          auVar806._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * in_ZMM21._40_4_;
          bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
          auVar806._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * in_ZMM21._44_4_;
          bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
          auVar806._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * in_ZMM21._48_4_;
          bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
          auVar806._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * in_ZMM21._52_4_;
          bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
          auVar806._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * in_ZMM21._56_4_;
          bVar12 = SUB81(uVar429 >> 0xf,0);
          auVar806._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * in_ZMM21._60_4_;
          auVar852 = vmaxps_avx512f(auVar852,auVar720);
          auVar852 = vdivps_avx512f(auVar806,auVar852);
          in_ZMM21 = vmulps_avx512f(auVar852,auVar852);
          in_ZMM22 = vmulps_avx512f(in_ZMM21,in_ZMM21);
          auVar733 = vfmadd213ps_avx512f(auVar721,in_ZMM22,auVar722);
          auVar733 = vfmadd213ps_avx512f(auVar733,in_ZMM22,auVar723);
          auVar736 = vfmadd213ps_avx512f(auVar725,in_ZMM22,auVar726);
          auVar736 = vfmadd213ps_avx512f(auVar736,in_ZMM22,auVar727);
          auVar736 = vfmadd213ps_avx512f(auVar736,in_ZMM22,auVar728);
          auVar733 = vfmadd213ps_avx512f(auVar733,in_ZMM22,auVar724);
          auVar736 = vfmadd213ps_avx512f(auVar736,in_ZMM22,auVar720);
          auVar733 = vfmadd231ps_avx512f(auVar736,in_ZMM21,auVar733);
          auVar852 = vmulps_avx512f(auVar733,auVar852);
          uVar431 = vcmpps_avx512f(auVar1774,auVar730,4);
          auVar733 = vaddps_avx512f(auVar852,auVar729);
          bVar12 = (bool)((byte)uVar429 & 1);
          auVar807._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar852._0_4_;
          bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
          auVar807._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar852._4_4_;
          bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
          auVar807._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar852._8_4_;
          bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
          auVar807._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar852._12_4_;
          bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
          auVar807._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar852._16_4_;
          bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
          auVar807._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar852._20_4_;
          bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
          auVar807._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar852._24_4_;
          bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
          auVar807._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar852._28_4_;
          bVar12 = (bool)(bVar29 & 1);
          auVar807._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar852._32_4_;
          bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
          auVar807._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar852._36_4_;
          bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
          auVar807._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar852._40_4_;
          bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
          auVar807._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar852._44_4_;
          bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
          auVar807._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar852._48_4_;
          bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
          auVar807._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar852._52_4_;
          bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
          auVar807._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar852._56_4_;
          bVar12 = SUB81(uVar429 >> 0xf,0);
          auVar807._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar852._60_4_;
          auVar737 = vpternlogd_avx512f(auVar807,auVar737,auVar717,0xf8);
          auVar852 = vaddps_avx512f(auVar737,auVar805);
          bVar12 = (bool)((byte)uVar47 & 1);
          in_ZMM19._0_4_ = (uint)bVar12 * auVar852._0_4_ | (uint)!bVar12 * auVar737._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          in_ZMM19._4_4_ = (uint)bVar12 * auVar852._4_4_ | (uint)!bVar12 * auVar737._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          in_ZMM19._8_4_ = (uint)bVar12 * auVar852._8_4_ | (uint)!bVar12 * auVar737._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          in_ZMM19._12_4_ = (uint)bVar12 * auVar852._12_4_ | (uint)!bVar12 * auVar737._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          in_ZMM19._16_4_ = (uint)bVar12 * auVar852._16_4_ | (uint)!bVar12 * auVar737._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          in_ZMM19._20_4_ = (uint)bVar12 * auVar852._20_4_ | (uint)!bVar12 * auVar737._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          in_ZMM19._24_4_ = (uint)bVar12 * auVar852._24_4_ | (uint)!bVar12 * auVar737._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          in_ZMM19._28_4_ = (uint)bVar12 * auVar852._28_4_ | (uint)!bVar12 * auVar737._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          in_ZMM19._32_4_ = (uint)bVar12 * auVar852._32_4_ | (uint)!bVar12 * auVar737._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          in_ZMM19._36_4_ = (uint)bVar12 * auVar852._36_4_ | (uint)!bVar12 * auVar737._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          in_ZMM19._40_4_ = (uint)bVar12 * auVar852._40_4_ | (uint)!bVar12 * auVar737._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          in_ZMM19._44_4_ = (uint)bVar12 * auVar852._44_4_ | (uint)!bVar12 * auVar737._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          in_ZMM19._48_4_ = (uint)bVar12 * auVar852._48_4_ | (uint)!bVar12 * auVar737._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          in_ZMM19._52_4_ = (uint)bVar12 * auVar852._52_4_ | (uint)!bVar12 * auVar737._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          in_ZMM19._56_4_ = (uint)bVar12 * auVar852._56_4_ | (uint)!bVar12 * auVar737._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          in_ZMM19._60_4_ = (uint)bVar12 * auVar852._60_4_ | (uint)!bVar12 * auVar737._60_4_;
          auVar1774 = vpternlogd_avx512f(auVar1774,auVar717,auVar734,0xea);
          bVar12 = (bool)((byte)uVar430 & 1);
          auVar808._0_4_ = bVar12 * in_ZMM19._0_4_ | (uint)!bVar12 * auVar1774._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar808._4_4_ = bVar12 * in_ZMM19._4_4_ | (uint)!bVar12 * auVar1774._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar808._8_4_ = bVar12 * in_ZMM19._8_4_ | (uint)!bVar12 * auVar1774._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar808._12_4_ = bVar12 * in_ZMM19._12_4_ | (uint)!bVar12 * auVar1774._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar808._16_4_ = bVar12 * in_ZMM19._16_4_ | (uint)!bVar12 * auVar1774._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar808._20_4_ = bVar12 * in_ZMM19._20_4_ | (uint)!bVar12 * auVar1774._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar808._24_4_ = bVar12 * in_ZMM19._24_4_ | (uint)!bVar12 * auVar1774._24_4_;
          bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
          auVar808._28_4_ = bVar12 * in_ZMM19._28_4_ | (uint)!bVar12 * auVar1774._28_4_;
          bVar12 = (bool)((byte)(uVar430 >> 8) & 1);
          auVar808._32_4_ = bVar12 * in_ZMM19._32_4_ | (uint)!bVar12 * auVar1774._32_4_;
          bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
          auVar808._36_4_ = bVar12 * in_ZMM19._36_4_ | (uint)!bVar12 * auVar1774._36_4_;
          bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
          auVar808._40_4_ = bVar12 * in_ZMM19._40_4_ | (uint)!bVar12 * auVar1774._40_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
          auVar808._44_4_ = bVar12 * in_ZMM19._44_4_ | (uint)!bVar12 * auVar1774._44_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
          auVar808._48_4_ = bVar12 * in_ZMM19._48_4_ | (uint)!bVar12 * auVar1774._48_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
          auVar808._52_4_ = bVar12 * in_ZMM19._52_4_ | (uint)!bVar12 * auVar1774._52_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
          auVar808._56_4_ = bVar12 * in_ZMM19._56_4_ | (uint)!bVar12 * auVar1774._56_4_;
          bVar12 = SUB81(uVar430 >> 0xf,0);
          auVar808._60_4_ = bVar12 * in_ZMM19._60_4_ | (uint)!bVar12 * auVar1774._60_4_;
          auVar1774 = vblendmps_avx512f(auVar804,auVar808);
          bVar12 = (bool)((byte)uVar431 & 1);
          bVar13 = (bool)((byte)(uVar431 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar431 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar431 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar431 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar431 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar431 >> 6) & 1);
          bVar19 = (bool)((byte)(uVar431 >> 7) & 1);
          bVar20 = (bool)((byte)(uVar431 >> 8) & 1);
          bVar21 = (bool)((byte)(uVar431 >> 9) & 1);
          bVar22 = (bool)((byte)(uVar431 >> 10) & 1);
          bVar23 = (bool)((byte)(uVar431 >> 0xb) & 1);
          bVar24 = (bool)((byte)(uVar431 >> 0xc) & 1);
          bVar25 = (bool)((byte)(uVar431 >> 0xd) & 1);
          bVar26 = (bool)((byte)(uVar431 >> 0xe) & 1);
          bVar27 = SUB81(uVar431 >> 0xf,0);
          *(uint *)*(undefined1 (*) [32])outptr =
               (uint)bVar12 * auVar1774._0_4_ | !bVar12 * auVar808._0_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 4) =
               (uint)bVar13 * auVar1774._4_4_ | !bVar13 * auVar808._4_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 8) =
               (uint)bVar14 * auVar1774._8_4_ | !bVar14 * auVar808._8_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 0xc) =
               (uint)bVar15 * auVar1774._12_4_ | !bVar15 * auVar808._12_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 0x10) =
               (uint)bVar16 * auVar1774._16_4_ | !bVar16 * auVar808._16_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 0x14) =
               (uint)bVar17 * auVar1774._20_4_ | !bVar17 * auVar808._20_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 0x18) =
               (uint)bVar18 * auVar1774._24_4_ | !bVar18 * auVar808._24_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 0x1c) =
               (uint)bVar19 * auVar1774._28_4_ | !bVar19 * auVar808._28_4_;
          *(uint *)*(undefined1 (*) [32])((long)outptr + 0x20) =
               (uint)bVar20 * auVar1774._32_4_ | !bVar20 * auVar808._32_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 4) =
               (uint)bVar21 * auVar1774._36_4_ | !bVar21 * auVar808._36_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 8) =
               (uint)bVar22 * auVar1774._40_4_ | !bVar22 * auVar808._40_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0xc) =
               (uint)bVar23 * auVar1774._44_4_ | !bVar23 * auVar808._44_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x10) =
               (uint)bVar24 * auVar1774._48_4_ | !bVar24 * auVar808._48_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x14) =
               (uint)bVar25 * auVar1774._52_4_ | !bVar25 * auVar808._52_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x18) =
               (uint)bVar26 * auVar1774._56_4_ | !bVar26 * auVar808._56_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x1c) =
               (uint)bVar27 * auVar1774._60_4_ | !bVar27 * auVar808._60_4_;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar424 = iVar424 + 0x10;
          in_ZMM20 = auVar805;
        } while (iVar424 < (int)uVar427);
        uVar425 = uVar427 & 0x7ffffff0;
      }
      if ((int)(uVar425 | 7) < (int)uVar427) {
        fVar890 = *ptr1;
        auVar927._4_4_ = fVar890;
        auVar927._0_4_ = fVar890;
        auVar927._8_4_ = fVar890;
        auVar927._12_4_ = fVar890;
        auVar927._16_4_ = fVar890;
        auVar927._20_4_ = fVar890;
        auVar927._24_4_ = fVar890;
        auVar927._28_4_ = fVar890;
        auVar1003._8_4_ = 0x40490fdb;
        auVar1003._0_8_ = 0x40490fdb40490fdb;
        auVar1003._12_4_ = 0x40490fdb;
        auVar1003._16_4_ = 0x40490fdb;
        auVar1003._20_4_ = 0x40490fdb;
        auVar1003._24_4_ = 0x40490fdb;
        auVar1003._28_4_ = 0x40490fdb;
        auVar1204._8_4_ = 0x80000000;
        auVar1204._0_8_ = 0x8000000080000000;
        auVar1204._12_4_ = 0x80000000;
        auVar1204._16_4_ = 0x80000000;
        auVar1204._20_4_ = 0x80000000;
        auVar1204._24_4_ = 0x80000000;
        auVar1204._28_4_ = 0x80000000;
        auVar674 = vpternlogd_avx512vl(auVar1204,auVar927,auVar1003,0xea);
        auVar1064._0_4_ = 1.0 / fVar890;
        auVar1064._4_4_ = auVar1064._0_4_;
        auVar1064._8_4_ = auVar1064._0_4_;
        auVar1064._12_4_ = auVar1064._0_4_;
        auVar1064._16_4_ = auVar1064._0_4_;
        auVar1064._20_4_ = auVar1064._0_4_;
        auVar1064._24_4_ = auVar1064._0_4_;
        auVar1064._28_4_ = auVar1064._0_4_;
        auVar678 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        uVar46 = vcmpps_avx512vl(auVar678,auVar674,2);
        uVar47 = vcmpps_avx512vl(auVar927,auVar678,1);
        auVar1205._8_4_ = 0x80000000;
        auVar1205._0_8_ = 0x8000000080000000;
        auVar1205._12_4_ = 0x80000000;
        auVar1205._16_4_ = 0x80000000;
        auVar1205._20_4_ = 0x80000000;
        auVar1205._24_4_ = 0x80000000;
        auVar1205._28_4_ = 0x80000000;
        auVar1261._8_4_ = 0x40490fdb;
        auVar1261._0_8_ = 0x40490fdb40490fdb;
        auVar1261._12_4_ = 0x40490fdb;
        auVar1261._16_4_ = 0x40490fdb;
        auVar1261._20_4_ = 0x40490fdb;
        auVar1261._24_4_ = 0x40490fdb;
        auVar1261._28_4_ = 0x40490fdb;
        auVar1323._8_4_ = 0x7fffffff;
        auVar1323._0_8_ = 0x7fffffff7fffffff;
        auVar1323._12_4_ = 0x7fffffff;
        auVar1323._16_4_ = 0x7fffffff;
        auVar1323._20_4_ = 0x7fffffff;
        auVar1323._24_4_ = 0x7fffffff;
        auVar1323._28_4_ = 0x7fffffff;
        auVar1381._8_4_ = 0x3f800000;
        auVar1381._0_8_ = 0x3f8000003f800000;
        auVar1381._12_4_ = 0x3f800000;
        auVar1381._16_4_ = 0x3f800000;
        auVar1381._20_4_ = 0x3f800000;
        auVar1381._24_4_ = 0x3f800000;
        auVar1381._28_4_ = 0x3f800000;
        auVar1437._8_4_ = 0xbc83a25c;
        auVar1437._0_8_ = 0xbc83a25cbc83a25c;
        auVar1437._12_4_ = 0xbc83a25c;
        auVar1437._16_4_ = 0xbc83a25c;
        auVar1437._20_4_ = 0xbc83a25c;
        auVar1437._24_4_ = 0xbc83a25c;
        auVar1437._28_4_ = 0xbc83a25c;
        auVar1491._8_4_ = 0xbd99b01e;
        auVar1491._0_8_ = 0xbd99b01ebd99b01e;
        auVar1491._12_4_ = 0xbd99b01e;
        auVar1491._16_4_ = 0xbd99b01e;
        auVar1491._20_4_ = 0xbd99b01e;
        auVar1491._24_4_ = 0xbd99b01e;
        auVar1491._28_4_ = 0xbd99b01e;
        auVar1545._8_4_ = 0xbe117200;
        auVar1545._0_8_ = 0xbe117200be117200;
        auVar1545._12_4_ = 0xbe117200;
        auVar1545._16_4_ = 0xbe117200;
        auVar1545._20_4_ = 0xbe117200;
        auVar1545._24_4_ = 0xbe117200;
        auVar1545._28_4_ = 0xbe117200;
        auVar1599._8_4_ = 0xbeaaaa53;
        auVar1599._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1599._12_4_ = 0xbeaaaa53;
        auVar1599._16_4_ = 0xbeaaaa53;
        auVar1599._20_4_ = 0xbeaaaa53;
        auVar1599._24_4_ = 0xbeaaaa53;
        auVar1599._28_4_ = 0xbeaaaa53;
        auVar1653._8_4_ = 0x3b3ac537;
        auVar1653._0_8_ = 0x3b3ac5373b3ac537;
        auVar1653._12_4_ = 0x3b3ac537;
        auVar1653._16_4_ = 0x3b3ac537;
        auVar1653._20_4_ = 0x3b3ac537;
        auVar1653._24_4_ = 0x3b3ac537;
        auVar1653._28_4_ = 0x3b3ac537;
        auVar1707._8_4_ = 0x3d2edd4e;
        auVar1707._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1707._12_4_ = 0x3d2edd4e;
        auVar1707._16_4_ = 0x3d2edd4e;
        auVar1707._20_4_ = 0x3d2edd4e;
        auVar1707._24_4_ = 0x3d2edd4e;
        auVar1707._28_4_ = 0x3d2edd4e;
        auVar1758._8_4_ = 0x3dd9ed24;
        auVar1758._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1758._12_4_ = 0x3dd9ed24;
        auVar1758._16_4_ = 0x3dd9ed24;
        auVar1758._20_4_ = 0x3dd9ed24;
        auVar1758._24_4_ = 0x3dd9ed24;
        auVar1758._28_4_ = 0x3dd9ed24;
        auVar1809._8_4_ = 0x3e4cb974;
        auVar1809._0_8_ = 0x3e4cb9743e4cb974;
        auVar1809._12_4_ = 0x3e4cb974;
        auVar1809._16_4_ = 0x3e4cb974;
        auVar1809._20_4_ = 0x3e4cb974;
        auVar1809._24_4_ = 0x3e4cb974;
        auVar1809._28_4_ = 0x3e4cb974;
        auVar674 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        auVar677 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        uVar882 = uVar425;
        do {
          auVar562 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
          auVar679 = vmulps_avx512vl(auVar562,auVar1064);
          uVar430 = vcmpps_avx512vl(auVar562,auVar678,1);
          vandps_avx512vl(auVar679,auVar1323);
          auVar194._8_4_ = 0xc0490fdb;
          auVar194._0_8_ = 0xc0490fdbc0490fdb;
          auVar194._12_4_ = 0xc0490fdb;
          auVar194._16_4_ = 0xc0490fdb;
          auVar194._20_4_ = 0xc0490fdb;
          auVar194._24_4_ = 0xc0490fdb;
          auVar194._28_4_ = 0xc0490fdb;
          auVar680 = vblendmps_avx512vl(auVar1261,auVar194);
          bVar12 = (bool)((byte)uVar430 & 1);
          auVar631._0_4_ = (uint)bVar12 * auVar680._0_4_ | (uint)!bVar12 * in_ZMM21._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar631._4_4_ = (uint)bVar12 * auVar680._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar631._8_4_ = (uint)bVar12 * auVar680._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar631._12_4_ = (uint)bVar12 * auVar680._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar631._16_4_ = (uint)bVar12 * auVar680._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar631._20_4_ = (uint)bVar12 * auVar680._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar631._24_4_ = (uint)bVar12 * auVar680._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
          bVar12 = SUB81(uVar430 >> 7,0);
          auVar631._28_4_ = (uint)bVar12 * auVar680._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
          in_ZMM21 = ZEXT3264(auVar631);
          uVar430 = vcmpps_avx512vl(auVar1381,auVar679,1);
          auVar195._8_4_ = 0xbf800000;
          auVar195._0_8_ = 0xbf800000bf800000;
          auVar195._12_4_ = 0xbf800000;
          auVar195._16_4_ = 0xbf800000;
          auVar195._20_4_ = 0xbf800000;
          auVar195._24_4_ = 0xbf800000;
          auVar195._28_4_ = 0xbf800000;
          auVar680 = vblendmps_avx512vl(auVar679,auVar195);
          bVar29 = (byte)uVar430;
          auVar632._0_4_ =
               (uint)(bVar29 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM22._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar632._4_4_ = (uint)bVar12 * auVar680._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar632._8_4_ = (uint)bVar12 * auVar680._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar632._12_4_ = (uint)bVar12 * auVar680._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar632._16_4_ = (uint)bVar12 * auVar680._16_4_ | (uint)!bVar12 * in_ZMM22._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar632._20_4_ = (uint)bVar12 * auVar680._20_4_ | (uint)!bVar12 * in_ZMM22._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar632._24_4_ = (uint)bVar12 * auVar680._24_4_ | (uint)!bVar12 * in_ZMM22._24_4_;
          bVar12 = SUB81(uVar430 >> 7,0);
          auVar632._28_4_ = (uint)bVar12 * auVar680._28_4_ | (uint)!bVar12 * in_ZMM22._28_4_;
          auVar680 = vdivps_avx512vl(auVar632,auVar679);
          auVar633._0_4_ =
               (uint)(bVar29 & 1) * auVar680._0_4_ | !(bool)(bVar29 & 1) * auVar632._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar633._4_4_ = (uint)bVar12 * auVar680._4_4_ | !bVar12 * auVar632._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar633._8_4_ = (uint)bVar12 * auVar680._8_4_ | !bVar12 * auVar632._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar633._12_4_ = (uint)bVar12 * auVar680._12_4_ | !bVar12 * auVar632._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar633._16_4_ = (uint)bVar12 * auVar680._16_4_ | !bVar12 * auVar632._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar633._20_4_ = (uint)bVar12 * auVar680._20_4_ | !bVar12 * auVar632._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar633._24_4_ = (uint)bVar12 * auVar680._24_4_ | !bVar12 * auVar632._24_4_;
          bVar12 = SUB81(uVar430 >> 7,0);
          auVar633._28_4_ = (uint)bVar12 * auVar680._28_4_ | !bVar12 * auVar632._28_4_;
          in_ZMM22 = ZEXT3264(auVar633);
          uVar429 = vcmpps_avx512vl(auVar562,auVar678,4);
          auVar680 = vmulps_avx512vl(auVar633,auVar633);
          vandps_avx512vl(auVar562,auVar1205);
          auVar562 = vmulps_avx512vl(auVar680,auVar680);
          auVar683 = vfmadd213ps_avx512vl(auVar1437,auVar562,auVar1491);
          auVar683 = vfmadd213ps_avx512vl(auVar683,auVar562,auVar1545);
          auVar684 = vfmadd213ps_avx512vl(auVar1653,auVar562,auVar1707);
          auVar684 = vfmadd213ps_avx512vl(auVar684,auVar562,auVar1758);
          auVar683 = vfmadd213ps_avx512vl(auVar683,auVar562,auVar1599);
          auVar684 = vfmadd213ps_avx512vl(auVar684,auVar562,auVar1809);
          auVar562 = vfmadd213ps_avx512vl(auVar684,auVar562,auVar1381);
          auVar562 = vfmadd231ps_avx512vl(auVar562,auVar680,auVar683);
          uVar431 = vcmpps_avx512vl(auVar927,auVar678,4);
          uVar431 = uVar429 & uVar431;
          auVar562 = vmulps_avx512vl(auVar562,auVar633);
          auVar683 = vaddps_avx512vl(auVar562,auVar674);
          auVar634._0_4_ =
               (uint)(bVar29 & 1) * auVar683._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar562._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar634._4_4_ = (uint)bVar12 * auVar683._4_4_ | (uint)!bVar12 * auVar562._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar634._8_4_ = (uint)bVar12 * auVar683._8_4_ | (uint)!bVar12 * auVar562._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar634._12_4_ = (uint)bVar12 * auVar683._12_4_ | (uint)!bVar12 * auVar562._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar634._16_4_ = (uint)bVar12 * auVar683._16_4_ | (uint)!bVar12 * auVar562._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar634._20_4_ = (uint)bVar12 * auVar683._20_4_ | (uint)!bVar12 * auVar562._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar634._24_4_ = (uint)bVar12 * auVar683._24_4_ | (uint)!bVar12 * auVar562._24_4_;
          bVar12 = SUB81(uVar430 >> 7,0);
          auVar634._28_4_ = (uint)bVar12 * auVar683._28_4_ | (uint)!bVar12 * auVar562._28_4_;
          auVar562 = vpternlogd_avx512vl(auVar634,auVar679,auVar1205,0xf8);
          auVar679 = vaddps_avx512vl(auVar562,auVar631);
          bVar12 = (bool)((byte)uVar47 & 1);
          bVar14 = (bool)((byte)(uVar47 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar47 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar47 >> 3) & 1);
          bVar20 = (bool)((byte)(uVar47 >> 4) & 1);
          bVar22 = (bool)((byte)(uVar47 >> 5) & 1);
          bVar24 = (bool)((byte)(uVar47 >> 6) & 1);
          bVar26 = SUB81(uVar47 >> 7,0);
          auVar680 = vorps_avx512vl(auVar680,auVar677);
          auVar635._4_4_ = (uint)((byte)(uVar429 >> 1) & 1) * auVar680._4_4_;
          auVar635._0_4_ = (uint)((byte)uVar429 & 1) * auVar680._0_4_;
          auVar635._8_4_ = (uint)((byte)(uVar429 >> 2) & 1) * auVar680._8_4_;
          auVar635._12_4_ = (uint)((byte)(uVar429 >> 3) & 1) * auVar680._12_4_;
          auVar635._16_4_ = (uint)((byte)(uVar429 >> 4) & 1) * auVar680._16_4_;
          auVar635._20_4_ = (uint)((byte)(uVar429 >> 5) & 1) * auVar680._20_4_;
          auVar635._24_4_ = (uint)((byte)(uVar429 >> 6) & 1) * auVar680._24_4_;
          auVar635._28_4_ = (uint)(byte)(uVar429 >> 7) * auVar680._28_4_;
          bVar29 = (byte)uVar429 | (byte)uVar46;
          auVar680 = vorps_avx512vl(auVar635,auVar1003);
          auVar683 = vmovdqa32_avx512vl(auVar635);
          bVar15 = (bool)(bVar29 >> 1 & 1);
          bVar17 = (bool)(bVar29 >> 2 & 1);
          bVar19 = (bool)(bVar29 >> 3 & 1);
          bVar21 = (bool)(bVar29 >> 4 & 1);
          bVar23 = (bool)(bVar29 >> 5 & 1);
          bVar25 = (bool)(bVar29 >> 6 & 1);
          bVar13 = (bool)((byte)uVar431 & 1);
          auVar636._0_4_ =
               (uint)bVar13 * ((uint)bVar12 * auVar679._0_4_ | (uint)!bVar12 * auVar562._0_4_) |
               (uint)!bVar13 *
               ((uint)(bVar29 & 1) * auVar683._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar680._0_4_);
          bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
          auVar636._4_4_ =
               (uint)bVar12 * ((uint)bVar14 * auVar679._4_4_ | (uint)!bVar14 * auVar562._4_4_) |
               (uint)!bVar12 * ((uint)bVar15 * auVar683._4_4_ | (uint)!bVar15 * auVar680._4_4_);
          bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
          auVar636._8_4_ =
               (uint)bVar12 * ((uint)bVar16 * auVar679._8_4_ | (uint)!bVar16 * auVar562._8_4_) |
               (uint)!bVar12 * ((uint)bVar17 * auVar683._8_4_ | (uint)!bVar17 * auVar680._8_4_);
          bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
          auVar636._12_4_ =
               (uint)bVar12 * ((uint)bVar18 * auVar679._12_4_ | (uint)!bVar18 * auVar562._12_4_) |
               (uint)!bVar12 * ((uint)bVar19 * auVar683._12_4_ | (uint)!bVar19 * auVar680._12_4_);
          bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
          auVar636._16_4_ =
               (uint)bVar12 * ((uint)bVar20 * auVar679._16_4_ | (uint)!bVar20 * auVar562._16_4_) |
               (uint)!bVar12 * ((uint)bVar21 * auVar683._16_4_ | (uint)!bVar21 * auVar680._16_4_);
          bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
          auVar636._20_4_ =
               (uint)bVar12 * ((uint)bVar22 * auVar679._20_4_ | (uint)!bVar22 * auVar562._20_4_) |
               (uint)!bVar12 * ((uint)bVar23 * auVar683._20_4_ | (uint)!bVar23 * auVar680._20_4_);
          bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
          auVar636._24_4_ =
               (uint)bVar12 * ((uint)bVar24 * auVar679._24_4_ | (uint)!bVar24 * auVar562._24_4_) |
               (uint)!bVar12 * ((uint)bVar25 * auVar683._24_4_ | (uint)!bVar25 * auVar680._24_4_);
          bVar12 = SUB81(uVar431 >> 7,0);
          auVar636._28_4_ =
               (uint)bVar12 * ((uint)bVar26 * auVar679._28_4_ | (uint)!bVar26 * auVar562._28_4_) |
               (uint)!bVar12 *
               ((uint)(bVar29 >> 7) * auVar683._28_4_ | (uint)!(bool)(bVar29 >> 7) * auVar680._28_4_
               );
          in_ZMM19 = ZEXT3264(auVar636);
          *(undefined1 (*) [32])outptr = auVar636;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)outptr + 0x20);
          uVar425 = uVar882 + 8;
          iVar424 = uVar882 + 0xf;
          uVar882 = uVar425;
        } while (iVar424 < (int)uVar427);
      }
      if ((int)uVar427 <= (int)(uVar425 | 3)) {
        return;
      }
      fVar890 = *ptr1;
      auVar903._4_4_ = fVar890;
      auVar903._0_4_ = fVar890;
      auVar903._8_4_ = fVar890;
      auVar903._12_4_ = fVar890;
      auVar961._8_4_ = 0x40490fdb;
      auVar961._0_8_ = 0x40490fdb40490fdb;
      auVar961._12_4_ = 0x40490fdb;
      auVar1180._8_4_ = 0x80000000;
      auVar1180._0_8_ = 0x8000000080000000;
      auVar1180._12_4_ = 0x80000000;
      auVar442 = vpternlogd_avx512vl(auVar1180,auVar903,auVar961,0xea);
      auVar1046._0_4_ = 1.0 / fVar890;
      auVar1046._4_4_ = auVar1046._0_4_;
      auVar1046._8_4_ = auVar1046._0_4_;
      auVar1046._12_4_ = auVar1046._0_4_;
      lVar428 = 0;
      auVar461 = ZEXT816(0) << 0x40;
      uVar46 = vcmpps_avx512vl(auVar461,auVar442,2);
      uVar47 = vcmpps_avx512vl(auVar903,auVar461,1);
      auVar1181._8_4_ = 0x80000000;
      auVar1181._0_8_ = 0x8000000080000000;
      auVar1181._12_4_ = 0x80000000;
      auVar1232._8_4_ = 0x40490fdb;
      auVar1232._0_8_ = 0x40490fdb40490fdb;
      auVar1232._12_4_ = 0x40490fdb;
      auVar1297._8_4_ = 0x7fffffff;
      auVar1297._0_8_ = 0x7fffffff7fffffff;
      auVar1297._12_4_ = 0x7fffffff;
      auVar1358._8_4_ = 0x3f800000;
      auVar1358._0_8_ = 0x3f8000003f800000;
      auVar1358._12_4_ = 0x3f800000;
      auVar1414._8_4_ = 0xbc83a25c;
      auVar1414._0_8_ = 0xbc83a25cbc83a25c;
      auVar1414._12_4_ = 0xbc83a25c;
      auVar1468._8_4_ = 0xbd99b01e;
      auVar1468._0_8_ = 0xbd99b01ebd99b01e;
      auVar1468._12_4_ = 0xbd99b01e;
      auVar1522._8_4_ = 0xbe117200;
      auVar1522._0_8_ = 0xbe117200be117200;
      auVar1522._12_4_ = 0xbe117200;
      auVar1576._8_4_ = 0xbeaaaa53;
      auVar1576._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1576._12_4_ = 0xbeaaaa53;
      auVar1630._8_4_ = 0x3b3ac537;
      auVar1630._0_8_ = 0x3b3ac5373b3ac537;
      auVar1630._12_4_ = 0x3b3ac537;
      auVar1684._8_4_ = 0x3d2edd4e;
      auVar1684._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1684._12_4_ = 0x3d2edd4e;
      auVar1738._8_4_ = 0x3dd9ed24;
      auVar1738._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1738._12_4_ = 0x3dd9ed24;
      auVar1789._8_4_ = 0x3e4cb974;
      auVar1789._0_8_ = 0x3e4cb9743e4cb974;
      auVar1789._12_4_ = 0x3e4cb974;
      auVar442 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
      auVar460 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
      do {
        auVar519 = *(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar428 * 4);
        uVar430 = vcmpps_avx512vl(auVar519,auVar461,1);
        auVar68._8_4_ = 0xc0490fdb;
        auVar68._0_8_ = 0xc0490fdbc0490fdb;
        auVar68._12_4_ = 0xc0490fdb;
        auVar472 = vblendmps_avx512vl(auVar1232,auVar68);
        bVar12 = (bool)((byte)uVar430 & 1);
        auVar513._0_4_ = (uint)bVar12 * auVar472._0_4_ | (uint)!bVar12 * in_ZMM19._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar513._4_4_ = (uint)bVar12 * auVar472._4_4_ | (uint)!bVar12 * in_ZMM19._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar513._8_4_ = (uint)bVar12 * auVar472._8_4_ | (uint)!bVar12 * in_ZMM19._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar513._12_4_ = (uint)bVar12 * auVar472._12_4_ | (uint)!bVar12 * in_ZMM19._12_4_;
        uVar430 = vcmpps_avx512vl(auVar519,auVar461,4);
        auVar472 = vmulps_avx512vl(auVar519,auVar1046);
        auVar464 = vandps_avx512vl(auVar472,auVar1297);
        uVar429 = vcmpps_avx512vl(auVar1358,auVar464,1);
        auVar69._8_4_ = 0xbf800000;
        auVar69._0_8_ = 0xbf800000bf800000;
        auVar69._12_4_ = 0xbf800000;
        auVar465 = vblendmps_avx512vl(auVar464,auVar69);
        bVar29 = (byte)uVar429;
        auVar514._0_4_ =
             (uint)(bVar29 & 1) * auVar465._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM22._0_4_;
        bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
        auVar514._4_4_ = (uint)bVar12 * auVar465._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
        bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
        auVar514._8_4_ = (uint)bVar12 * auVar465._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
        bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
        auVar514._12_4_ = (uint)bVar12 * auVar465._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
        uVar431 = vcmpps_avx512vl(auVar903,auVar461,4);
        uVar431 = uVar430 & uVar431;
        auVar519 = vandps_avx512vl(auVar519,auVar1181);
        auVar464 = vdivps_avx512vl(auVar514,auVar464);
        auVar515._0_4_ = (uint)(bVar29 & 1) * auVar464._0_4_ | !(bool)(bVar29 & 1) * auVar514._0_4_;
        bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
        auVar515._4_4_ = (uint)bVar12 * auVar464._4_4_ | !bVar12 * auVar514._4_4_;
        bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
        auVar515._8_4_ = (uint)bVar12 * auVar464._8_4_ | !bVar12 * auVar514._8_4_;
        bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
        auVar515._12_4_ = (uint)bVar12 * auVar464._12_4_ | !bVar12 * auVar514._12_4_;
        in_ZMM22 = ZEXT1664(auVar515);
        auVar464 = vmulps_avx512vl(auVar515,auVar515);
        auVar465 = vmulps_avx512vl(auVar464,auVar464);
        auVar466 = vfmadd213ps_avx512vl(auVar1414,auVar465,auVar1468);
        auVar466 = vfmadd213ps_avx512vl(auVar466,auVar465,auVar1522);
        auVar466 = vfmadd213ps_avx512vl(auVar466,auVar465,auVar1576);
        auVar469 = vfmadd213ps_avx512vl(auVar1630,auVar465,auVar1684);
        auVar469 = vfmadd213ps_avx512vl(auVar469,auVar465,auVar1738);
        auVar469 = vfmadd213ps_avx512vl(auVar469,auVar465,auVar1789);
        auVar465 = vfmadd213ps_avx512vl(auVar469,auVar465,auVar1358);
        auVar464 = vfmadd231ps_avx512vl(auVar465,auVar464,auVar466);
        auVar464 = vmulps_avx512vl(auVar464,auVar515);
        auVar465 = vaddps_avx512vl(auVar464,auVar442);
        auVar516._0_4_ =
             (uint)(bVar29 & 1) * auVar465._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar464._0_4_;
        bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
        auVar516._4_4_ = (uint)bVar12 * auVar465._4_4_ | (uint)!bVar12 * auVar464._4_4_;
        bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
        auVar516._8_4_ = (uint)bVar12 * auVar465._8_4_ | (uint)!bVar12 * auVar464._8_4_;
        bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
        auVar516._12_4_ = (uint)bVar12 * auVar465._12_4_ | (uint)!bVar12 * auVar464._12_4_;
        auVar472 = vpternlogd_avx512vl(auVar516,auVar472,auVar1181,0xf8);
        auVar464 = vaddps_avx512vl(auVar472,auVar513);
        bVar12 = (bool)((byte)uVar47 & 1);
        bVar15 = (bool)((byte)(uVar47 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar47 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar519 = vorps_avx512vl(auVar519,auVar460);
        auVar517._4_4_ = (uint)((byte)(uVar430 >> 1) & 1) * auVar519._4_4_;
        auVar517._0_4_ = (uint)((byte)uVar430 & 1) * auVar519._0_4_;
        auVar517._8_4_ = (uint)((byte)(uVar430 >> 2) & 1) * auVar519._8_4_;
        auVar517._12_4_ = (uint)((byte)(uVar430 >> 3) & 1) * auVar519._12_4_;
        uVar48 = (ushort)uVar430 | (ushort)uVar46;
        auVar519 = vorps_avx512vl(auVar517,auVar961);
        auVar465 = vmovdqa32_avx512vl(auVar517);
        bVar13 = (bool)((byte)uVar48 & 1);
        bVar16 = (bool)((byte)(uVar48 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar48 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar48 >> 3) & 1);
        bVar14 = (bool)((byte)uVar431 & 1);
        auVar518._0_4_ =
             (uint)bVar14 * ((uint)bVar12 * auVar464._0_4_ | (uint)!bVar12 * auVar472._0_4_) |
             (uint)!bVar14 * ((uint)bVar13 * auVar465._0_4_ | (uint)!bVar13 * auVar519._0_4_);
        bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
        auVar518._4_4_ =
             (uint)bVar12 * ((uint)bVar15 * auVar464._4_4_ | (uint)!bVar15 * auVar472._4_4_) |
             (uint)!bVar12 * ((uint)bVar16 * auVar465._4_4_ | (uint)!bVar16 * auVar519._4_4_);
        bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
        auVar518._8_4_ =
             (uint)bVar12 * ((uint)bVar17 * auVar464._8_4_ | (uint)!bVar17 * auVar472._8_4_) |
             (uint)!bVar12 * ((uint)bVar18 * auVar465._8_4_ | (uint)!bVar18 * auVar519._8_4_);
        bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
        auVar518._12_4_ =
             (uint)bVar12 * ((uint)bVar19 * auVar464._12_4_ | (uint)!bVar19 * auVar472._12_4_) |
             (uint)!bVar12 * ((uint)bVar20 * auVar465._12_4_ | (uint)!bVar20 * auVar519._12_4_);
        in_ZMM19 = ZEXT1664(auVar518);
        *(undefined1 (*) [16])((long)*(undefined1 (*) [32])outptr + lVar428 * 4) = auVar518;
        lVar428 = lVar428 + 4;
      } while ((int)(uVar425 + 3 + (int)lVar428) < (int)uVar427);
      return;
    }
    if (aw != 1) {
      return;
    }
    if (iVar424 == 0x10) {
      auVar734 = *(undefined1 (*) [64])ptr;
      auVar730 = ZEXT1264(ZEXT812(0));
      uVar47 = vcmpps_avx512f(auVar734,auVar730,1);
      auVar716 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar717 = vbroadcastss_avx512f(ZEXT416(0xc0490fdb));
      bVar12 = (bool)((byte)uVar47 & 1);
      auVar840._0_4_ = (uint)bVar12 * auVar717._0_4_ | (uint)!bVar12 * auVar716._0_4_;
      bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
      auVar840._4_4_ = (uint)bVar12 * auVar717._4_4_ | (uint)!bVar12 * auVar716._4_4_;
      bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
      auVar840._8_4_ = (uint)bVar12 * auVar717._8_4_ | (uint)!bVar12 * auVar716._8_4_;
      bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar840._12_4_ = (uint)bVar12 * auVar717._12_4_ | (uint)!bVar12 * auVar716._12_4_;
      bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
      auVar840._16_4_ = (uint)bVar12 * auVar717._16_4_ | (uint)!bVar12 * auVar716._16_4_;
      bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
      auVar840._20_4_ = (uint)bVar12 * auVar717._20_4_ | (uint)!bVar12 * auVar716._20_4_;
      bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
      auVar840._24_4_ = (uint)bVar12 * auVar717._24_4_ | (uint)!bVar12 * auVar716._24_4_;
      bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
      auVar840._28_4_ = (uint)bVar12 * auVar717._28_4_ | (uint)!bVar12 * auVar716._28_4_;
      bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
      auVar840._32_4_ = (uint)bVar12 * auVar717._32_4_ | (uint)!bVar12 * auVar716._32_4_;
      bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
      auVar840._36_4_ = (uint)bVar12 * auVar717._36_4_ | (uint)!bVar12 * auVar716._36_4_;
      bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
      auVar840._40_4_ = (uint)bVar12 * auVar717._40_4_ | (uint)!bVar12 * auVar716._40_4_;
      bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
      auVar840._44_4_ = (uint)bVar12 * auVar717._44_4_ | (uint)!bVar12 * auVar716._44_4_;
      bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
      auVar840._48_4_ = (uint)bVar12 * auVar717._48_4_ | (uint)!bVar12 * auVar716._48_4_;
      bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
      auVar840._52_4_ = (uint)bVar12 * auVar717._52_4_ | (uint)!bVar12 * auVar716._52_4_;
      bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
      auVar840._56_4_ = (uint)bVar12 * auVar717._56_4_ | (uint)!bVar12 * auVar716._56_4_;
      bVar12 = SUB81(uVar47 >> 0xf,0);
      auVar840._60_4_ = (uint)bVar12 * auVar717._60_4_ | (uint)!bVar12 * auVar716._60_4_;
      auVar716 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      auVar352._8_4_ = 0x80000000;
      auVar352._0_8_ = 0x8000000080000000;
      auVar352._12_4_ = 0x80000000;
      auVar352._16_4_ = 0x80000000;
      auVar352._20_4_ = 0x80000000;
      auVar352._24_4_ = 0x80000000;
      auVar352._28_4_ = 0x80000000;
      auVar352._32_4_ = 0x80000000;
      auVar352._36_4_ = 0x80000000;
      auVar352._40_4_ = 0x80000000;
      auVar352._44_4_ = 0x80000000;
      auVar352._48_4_ = 0x80000000;
      auVar352._52_4_ = 0x80000000;
      auVar352._56_4_ = 0x80000000;
      auVar352._60_4_ = 0x80000000;
      auVar716 = vpternlogd_avx512f(auVar716,auVar734,auVar352,0xf8);
      auVar717 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      uVar47 = vcmpps_avx512f(auVar734,auVar730,4);
      auVar718 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar719 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar720 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar721 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar722 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar723 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar724 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar725 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar726 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar727 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar728 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar729 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      uVar427 = uVar425;
      do {
        auVar1774 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        auVar442 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar1774._0_16_);
        auVar737 = vbroadcastss_avx512f(auVar442);
        auVar737 = vmulps_avx512f(auVar734,auVar737);
        auVar852 = vandps_avx512dq(auVar737,auVar718);
        uVar430 = vcmpps_avx512f(auVar719,auVar852,1);
        auVar353._8_4_ = 0xbf800000;
        auVar353._0_8_ = 0xbf800000bf800000;
        auVar353._12_4_ = 0xbf800000;
        auVar353._16_4_ = 0xbf800000;
        auVar353._20_4_ = 0xbf800000;
        auVar353._24_4_ = 0xbf800000;
        auVar353._28_4_ = 0xbf800000;
        auVar353._32_4_ = 0xbf800000;
        auVar353._36_4_ = 0xbf800000;
        auVar353._40_4_ = 0xbf800000;
        auVar353._44_4_ = 0xbf800000;
        auVar353._48_4_ = 0xbf800000;
        auVar353._52_4_ = 0xbf800000;
        auVar353._56_4_ = 0xbf800000;
        auVar353._60_4_ = 0xbf800000;
        auVar733 = vblendmps_avx512f(auVar852,auVar353);
        bVar12 = (bool)((byte)uVar430 & 1);
        auVar841._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * in_ZMM21._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar841._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar841._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar841._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
        bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
        auVar841._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
        bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
        auVar841._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
        bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
        auVar841._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
        bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
        auVar841._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
        bVar29 = (byte)(uVar430 >> 8);
        bVar12 = (bool)(bVar29 & 1);
        auVar841._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * in_ZMM21._32_4_;
        bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
        auVar841._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * in_ZMM21._36_4_;
        bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
        auVar841._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * in_ZMM21._40_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
        auVar841._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * in_ZMM21._44_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
        auVar841._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * in_ZMM21._48_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
        auVar841._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * in_ZMM21._52_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
        auVar841._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * in_ZMM21._56_4_;
        bVar12 = SUB81(uVar430 >> 0xf,0);
        auVar841._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * in_ZMM21._60_4_;
        auVar852 = vmaxps_avx512f(auVar852,auVar719);
        auVar852 = vdivps_avx512f(auVar841,auVar852);
        uVar429 = vcmpps_avx512f(auVar1774,auVar730,4);
        in_ZMM21 = vmulps_avx512f(auVar852,auVar852);
        in_ZMM22 = vmulps_avx512f(in_ZMM21,in_ZMM21);
        auVar733 = vfmadd213ps_avx512f(auVar720,in_ZMM22,auVar721);
        auVar733 = vfmadd213ps_avx512f(auVar733,in_ZMM22,auVar722);
        auVar736 = vfmadd213ps_avx512f(auVar724,in_ZMM22,auVar725);
        auVar733 = vfmadd213ps_avx512f(auVar733,in_ZMM22,auVar723);
        auVar736 = vfmadd213ps_avx512f(auVar736,in_ZMM22,auVar726);
        auVar736 = vfmadd213ps_avx512f(auVar736,in_ZMM22,auVar727);
        auVar736 = vfmadd213ps_avx512f(auVar736,in_ZMM22,auVar719);
        uVar431 = vcmpps_avx512f(auVar1774,auVar730,1);
        auVar733 = vfmadd231ps_avx512f(auVar736,in_ZMM21,auVar733);
        auVar852 = vmulps_avx512f(auVar733,auVar852);
        auVar1774 = vpternlogd_avx512f(auVar1774,auVar717,auVar729,0xea);
        auVar733 = vaddps_avx512f(auVar852,auVar728);
        bVar12 = (bool)((byte)uVar430 & 1);
        auVar842._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar852._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar842._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar852._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar842._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar852._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar842._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar852._12_4_;
        bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
        auVar842._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar852._16_4_;
        bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
        auVar842._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar852._20_4_;
        bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
        auVar842._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar852._24_4_;
        bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
        auVar842._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar852._28_4_;
        bVar12 = (bool)(bVar29 & 1);
        auVar842._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar852._32_4_;
        bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
        auVar842._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar852._36_4_;
        bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
        auVar842._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar852._40_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
        auVar842._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar852._44_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
        auVar842._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar852._48_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
        auVar842._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar852._52_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
        auVar842._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar852._56_4_;
        bVar12 = SUB81(uVar430 >> 0xf,0);
        auVar842._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar852._60_4_;
        uVar430 = vcmpps_avx512f(auVar1774,auVar730,1);
        auVar1774 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar852 = vpternlogd_avx512f(auVar842,auVar737,auVar717,0xf8);
        auVar733 = vaddps_avx512f(auVar852,auVar840);
        bVar12 = (bool)((byte)uVar431 & 1);
        in_ZMM20._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar852._0_4_;
        bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
        in_ZMM20._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar852._4_4_;
        bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
        in_ZMM20._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar852._8_4_;
        bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
        in_ZMM20._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar852._12_4_;
        bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
        in_ZMM20._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar852._16_4_;
        bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
        in_ZMM20._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar852._20_4_;
        bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
        in_ZMM20._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar852._24_4_;
        bVar12 = (bool)((byte)(uVar431 >> 7) & 1);
        in_ZMM20._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar852._28_4_;
        bVar12 = (bool)((byte)(uVar431 >> 8) & 1);
        in_ZMM20._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar852._32_4_;
        bVar12 = (bool)((byte)(uVar431 >> 9) & 1);
        in_ZMM20._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar852._36_4_;
        bVar12 = (bool)((byte)(uVar431 >> 10) & 1);
        in_ZMM20._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar852._40_4_;
        bVar12 = (bool)((byte)(uVar431 >> 0xb) & 1);
        in_ZMM20._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar852._44_4_;
        bVar12 = (bool)((byte)(uVar431 >> 0xc) & 1);
        in_ZMM20._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar852._48_4_;
        bVar12 = (bool)((byte)(uVar431 >> 0xd) & 1);
        in_ZMM20._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar852._52_4_;
        bVar12 = (bool)((byte)(uVar431 >> 0xe) & 1);
        in_ZMM20._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar852._56_4_;
        bVar12 = SUB81(uVar431 >> 0xf,0);
        in_ZMM20._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar852._60_4_;
        auVar852 = vblendmps_avx512f(auVar716,in_ZMM20);
        bVar12 = (bool)((byte)uVar429 & 1);
        bVar14 = (bool)((byte)(uVar429 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar429 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar429 >> 3) & 1);
        bVar20 = (bool)((byte)(uVar429 >> 4) & 1);
        bVar22 = (bool)((byte)(uVar429 >> 5) & 1);
        bVar24 = (bool)((byte)(uVar429 >> 6) & 1);
        bVar26 = (bool)((byte)(uVar429 >> 7) & 1);
        bVar28 = (bool)((byte)(uVar429 >> 8) & 1);
        bVar31 = (bool)((byte)(uVar429 >> 9) & 1);
        bVar33 = (bool)((byte)(uVar429 >> 10) & 1);
        bVar35 = (bool)((byte)(uVar429 >> 0xb) & 1);
        bVar37 = (bool)((byte)(uVar429 >> 0xc) & 1);
        bVar39 = (bool)((byte)(uVar429 >> 0xd) & 1);
        bVar41 = (bool)((byte)(uVar429 >> 0xe) & 1);
        bVar43 = SUB81(uVar429 >> 0xf,0);
        bVar13 = (bool)((byte)uVar47 & 1);
        bVar15 = (bool)((byte)(uVar47 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar47 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar47 >> 3) & 1);
        bVar21 = (bool)((byte)(uVar47 >> 4) & 1);
        bVar23 = (bool)((byte)(uVar47 >> 5) & 1);
        bVar25 = (bool)((byte)(uVar47 >> 6) & 1);
        bVar27 = (bool)((byte)(uVar47 >> 7) & 1);
        bVar30 = (bool)((byte)(uVar47 >> 8) & 1);
        bVar32 = (bool)((byte)(uVar47 >> 9) & 1);
        bVar34 = (bool)((byte)(uVar47 >> 10) & 1);
        bVar36 = (bool)((byte)(uVar47 >> 0xb) & 1);
        bVar38 = (bool)((byte)(uVar47 >> 0xc) & 1);
        bVar40 = (bool)((byte)(uVar47 >> 0xd) & 1);
        bVar42 = (bool)((byte)(uVar47 >> 0xe) & 1);
        bVar44 = SUB81(uVar47 >> 0xf,0);
        *(uint *)*(undefined1 (*) [64])outptr =
             (uint)bVar13 * ((uint)bVar12 * auVar852._0_4_ | (uint)!bVar12 * auVar737._0_4_) |
             (uint)!bVar13 * (uint)((byte)uVar430 & 1) * auVar1774._0_4_;
        *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
             (uint)bVar15 * ((uint)bVar14 * auVar852._4_4_ | (uint)!bVar14 * auVar737._4_4_) |
             (uint)!bVar15 * (uint)((byte)(uVar430 >> 1) & 1) * auVar1774._4_4_;
        *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
             (uint)bVar17 * ((uint)bVar16 * auVar852._8_4_ | (uint)!bVar16 * auVar737._8_4_) |
             (uint)!bVar17 * (uint)((byte)(uVar430 >> 2) & 1) * auVar1774._8_4_;
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
             (uint)bVar19 * ((uint)bVar18 * auVar852._12_4_ | (uint)!bVar18 * auVar737._12_4_) |
             (uint)!bVar19 * (uint)((byte)(uVar430 >> 3) & 1) * auVar1774._12_4_;
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0x10) =
             (uint)bVar21 * ((uint)bVar20 * auVar852._16_4_ | (uint)!bVar20 * auVar737._16_4_) |
             (uint)!bVar21 * (uint)((byte)(uVar430 >> 4) & 1) * auVar1774._16_4_;
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0x14) =
             (uint)bVar23 * ((uint)bVar22 * auVar852._20_4_ | (uint)!bVar22 * auVar737._20_4_) |
             (uint)!bVar23 * (uint)((byte)(uVar430 >> 5) & 1) * auVar1774._20_4_;
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0x18) =
             (uint)bVar25 * ((uint)bVar24 * auVar852._24_4_ | (uint)!bVar24 * auVar737._24_4_) |
             (uint)!bVar25 * (uint)((byte)(uVar430 >> 6) & 1) * auVar1774._24_4_;
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0x1c) =
             (uint)bVar27 * ((uint)bVar26 * auVar852._28_4_ | (uint)!bVar26 * auVar737._28_4_) |
             (uint)!bVar27 * (uint)((byte)(uVar430 >> 7) & 1) * auVar1774._28_4_;
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0x20) =
             (uint)bVar30 * ((uint)bVar28 * auVar852._32_4_ | (uint)!bVar28 * auVar737._32_4_) |
             (uint)!bVar30 * (uint)((byte)(uVar430 >> 8) & 1) * auVar1774._32_4_;
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0x24) =
             (uint)bVar32 * ((uint)bVar31 * auVar852._36_4_ | (uint)!bVar31 * auVar737._36_4_) |
             (uint)!bVar32 * (uint)((byte)(uVar430 >> 9) & 1) * auVar1774._36_4_;
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0x28) =
             (uint)bVar34 * ((uint)bVar33 * auVar852._40_4_ | (uint)!bVar33 * auVar737._40_4_) |
             (uint)!bVar34 * (uint)((byte)(uVar430 >> 10) & 1) * auVar1774._40_4_;
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0x2c) =
             (uint)bVar36 * ((uint)bVar35 * auVar852._44_4_ | (uint)!bVar35 * auVar737._44_4_) |
             (uint)!bVar36 * (uint)((byte)(uVar430 >> 0xb) & 1) * auVar1774._44_4_;
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0x30) =
             (uint)bVar38 * ((uint)bVar37 * auVar852._48_4_ | (uint)!bVar37 * auVar737._48_4_) |
             (uint)!bVar38 * (uint)((byte)(uVar430 >> 0xc) & 1) * auVar1774._48_4_;
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0x34) =
             (uint)bVar40 * ((uint)bVar39 * auVar852._52_4_ | (uint)!bVar39 * auVar737._52_4_) |
             (uint)!bVar40 * (uint)((byte)(uVar430 >> 0xd) & 1) * auVar1774._52_4_;
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0x38) =
             (uint)bVar42 * ((uint)bVar41 * auVar852._56_4_ | (uint)!bVar41 * auVar737._56_4_) |
             (uint)!bVar42 * (uint)((byte)(uVar430 >> 0xe) & 1) * auVar1774._56_4_;
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0x3c) =
             (uint)bVar44 * ((uint)bVar43 * auVar852._60_4_ | (uint)!bVar43 * auVar737._60_4_) |
             (uint)!bVar44 * (uint)(byte)(uVar430 >> 0xf) * auVar1774._60_4_;
        ptr1 = ptr1 + 1;
        outptr = (float *)((long)outptr + 0x40);
        uVar427 = uVar427 - 1;
      } while (uVar427 != 0);
    }
    if (iVar424 == 8) {
      auVar734 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
      uVar427 = 0;
      if (1 < (int)uVar425) {
        auVar730 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar47 = vcmpps_avx512f(auVar734,auVar730,1);
        auVar716 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar717 = vbroadcastss_avx512f(ZEXT416(0xc0490fdb));
        bVar12 = (bool)((byte)uVar47 & 1);
        auVar843._0_4_ = (uint)bVar12 * auVar717._0_4_ | (uint)!bVar12 * auVar716._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar843._4_4_ = (uint)bVar12 * auVar717._4_4_ | (uint)!bVar12 * auVar716._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar843._8_4_ = (uint)bVar12 * auVar717._8_4_ | (uint)!bVar12 * auVar716._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar843._12_4_ = (uint)bVar12 * auVar717._12_4_ | (uint)!bVar12 * auVar716._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar843._16_4_ = (uint)bVar12 * auVar717._16_4_ | (uint)!bVar12 * auVar716._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar843._20_4_ = (uint)bVar12 * auVar717._20_4_ | (uint)!bVar12 * auVar716._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar843._24_4_ = (uint)bVar12 * auVar717._24_4_ | (uint)!bVar12 * auVar716._24_4_;
        bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
        auVar843._28_4_ = (uint)bVar12 * auVar717._28_4_ | (uint)!bVar12 * auVar716._28_4_;
        bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
        auVar843._32_4_ = (uint)bVar12 * auVar717._32_4_ | (uint)!bVar12 * auVar716._32_4_;
        bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
        auVar843._36_4_ = (uint)bVar12 * auVar717._36_4_ | (uint)!bVar12 * auVar716._36_4_;
        bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
        auVar843._40_4_ = (uint)bVar12 * auVar717._40_4_ | (uint)!bVar12 * auVar716._40_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
        auVar843._44_4_ = (uint)bVar12 * auVar717._44_4_ | (uint)!bVar12 * auVar716._44_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
        auVar843._48_4_ = (uint)bVar12 * auVar717._48_4_ | (uint)!bVar12 * auVar716._48_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
        auVar843._52_4_ = (uint)bVar12 * auVar717._52_4_ | (uint)!bVar12 * auVar716._52_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
        auVar843._56_4_ = (uint)bVar12 * auVar717._56_4_ | (uint)!bVar12 * auVar716._56_4_;
        bVar12 = SUB81(uVar47 >> 0xf,0);
        auVar843._60_4_ = (uint)bVar12 * auVar717._60_4_ | (uint)!bVar12 * auVar716._60_4_;
        auVar716 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        auVar354._8_4_ = 0x80000000;
        auVar354._0_8_ = 0x8000000080000000;
        auVar354._12_4_ = 0x80000000;
        auVar354._16_4_ = 0x80000000;
        auVar354._20_4_ = 0x80000000;
        auVar354._24_4_ = 0x80000000;
        auVar354._28_4_ = 0x80000000;
        auVar354._32_4_ = 0x80000000;
        auVar354._36_4_ = 0x80000000;
        auVar354._40_4_ = 0x80000000;
        auVar354._44_4_ = 0x80000000;
        auVar354._48_4_ = 0x80000000;
        auVar354._52_4_ = 0x80000000;
        auVar354._56_4_ = 0x80000000;
        auVar354._60_4_ = 0x80000000;
        auVar716 = vpternlogd_avx512f(auVar716,auVar734,auVar354,0xf8);
        iVar426 = 1;
        uVar47 = vcmpps_avx512f(auVar734,auVar730,4);
        auVar717 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar718 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar719 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar720 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar721 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar722 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar723 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar724 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar725 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar726 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar727 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar728 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar729 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        do {
          auVar674 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          auVar677 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
          auVar1774 = vinsertf64x4_avx512f(ZEXT3264(auVar674),auVar677,1);
          auVar737 = vdivps_avx512f(auVar734,auVar1774);
          auVar852 = vandps_avx512dq(auVar737,auVar718);
          uVar430 = vcmpps_avx512f(auVar719,auVar852,1);
          auVar355._8_4_ = 0xbf800000;
          auVar355._0_8_ = 0xbf800000bf800000;
          auVar355._12_4_ = 0xbf800000;
          auVar355._16_4_ = 0xbf800000;
          auVar355._20_4_ = 0xbf800000;
          auVar355._24_4_ = 0xbf800000;
          auVar355._28_4_ = 0xbf800000;
          auVar355._32_4_ = 0xbf800000;
          auVar355._36_4_ = 0xbf800000;
          auVar355._40_4_ = 0xbf800000;
          auVar355._44_4_ = 0xbf800000;
          auVar355._48_4_ = 0xbf800000;
          auVar355._52_4_ = 0xbf800000;
          auVar355._56_4_ = 0xbf800000;
          auVar355._60_4_ = 0xbf800000;
          auVar733 = vblendmps_avx512f(auVar852,auVar355);
          bVar12 = (bool)((byte)uVar430 & 1);
          auVar844._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * in_ZMM20._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar844._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * in_ZMM20._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar844._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * in_ZMM20._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar844._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * in_ZMM20._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar844._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * in_ZMM20._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar844._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * in_ZMM20._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar844._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * in_ZMM20._24_4_;
          bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
          auVar844._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * in_ZMM20._28_4_;
          bVar29 = (byte)(uVar430 >> 8);
          bVar12 = (bool)(bVar29 & 1);
          auVar844._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * in_ZMM20._32_4_;
          bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
          auVar844._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * in_ZMM20._36_4_;
          bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
          auVar844._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * in_ZMM20._40_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
          auVar844._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * in_ZMM20._44_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
          auVar844._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * in_ZMM20._48_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
          auVar844._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * in_ZMM20._52_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
          auVar844._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * in_ZMM20._56_4_;
          bVar12 = SUB81(uVar430 >> 0xf,0);
          auVar844._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * in_ZMM20._60_4_;
          auVar852 = vmaxps_avx512f(auVar852,auVar719);
          auVar852 = vdivps_avx512f(auVar844,auVar852);
          in_ZMM20 = vmulps_avx512f(auVar852,auVar852);
          uVar429 = vcmpps_avx512f(auVar1774,auVar730,4);
          auVar733 = vmulps_avx512f(in_ZMM20,in_ZMM20);
          auVar736 = vfmadd213ps_avx512f(auVar720,auVar733,auVar721);
          auVar736 = vfmadd213ps_avx512f(auVar736,auVar733,auVar722);
          auVar731 = vfmadd213ps_avx512f(auVar724,auVar733,auVar725);
          auVar731 = vfmadd213ps_avx512f(auVar731,auVar733,auVar726);
          in_ZMM22 = vfmadd213ps_avx512f(auVar736,auVar733,auVar723);
          auVar736 = vfmadd213ps_avx512f(auVar731,auVar733,auVar727);
          auVar733 = vfmadd213ps_avx512f(auVar736,auVar733,auVar719);
          auVar733 = vfmadd231ps_avx512f(auVar733,in_ZMM20,in_ZMM22);
          uVar431 = vcmpps_avx512f(auVar1774,auVar730,1);
          auVar852 = vmulps_avx512f(auVar733,auVar852);
          auVar733 = vaddps_avx512f(auVar852,auVar728);
          bVar12 = (bool)((byte)uVar430 & 1);
          auVar845._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar852._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar845._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar852._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar845._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar852._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar845._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar852._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar845._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar852._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar845._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar852._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar845._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar852._24_4_;
          bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
          auVar845._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar852._28_4_;
          bVar12 = (bool)(bVar29 & 1);
          auVar845._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar852._32_4_;
          bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
          auVar845._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar852._36_4_;
          bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
          auVar845._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar852._40_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
          auVar845._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar852._44_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
          auVar845._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar852._48_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
          auVar845._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar852._52_4_;
          bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
          auVar845._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar852._56_4_;
          bVar12 = SUB81(uVar430 >> 0xf,0);
          auVar845._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar852._60_4_;
          auVar1774 = vpternlogd_avx512f(auVar1774,auVar717,auVar729,0xea);
          auVar852 = vpternlogd_avx512f(auVar845,auVar737,auVar717,0xf8);
          uVar430 = vcmpps_avx512f(auVar1774,auVar730,1);
          auVar1774 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar733 = vaddps_avx512f(auVar852,auVar843);
          bVar12 = (bool)((byte)uVar431 & 1);
          auVar846._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar852._0_4_;
          bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
          auVar846._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar852._4_4_;
          bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
          auVar846._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar852._8_4_;
          bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
          auVar846._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar852._12_4_;
          bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
          auVar846._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar852._16_4_;
          bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
          auVar846._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar852._20_4_;
          bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
          auVar846._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar852._24_4_;
          bVar12 = (bool)((byte)(uVar431 >> 7) & 1);
          auVar846._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar852._28_4_;
          bVar12 = (bool)((byte)(uVar431 >> 8) & 1);
          auVar846._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar852._32_4_;
          bVar12 = (bool)((byte)(uVar431 >> 9) & 1);
          auVar846._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar852._36_4_;
          bVar12 = (bool)((byte)(uVar431 >> 10) & 1);
          auVar846._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar852._40_4_;
          bVar12 = (bool)((byte)(uVar431 >> 0xb) & 1);
          auVar846._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar852._44_4_;
          bVar12 = (bool)((byte)(uVar431 >> 0xc) & 1);
          auVar846._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar852._48_4_;
          bVar12 = (bool)((byte)(uVar431 >> 0xd) & 1);
          auVar846._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar852._52_4_;
          bVar12 = (bool)((byte)(uVar431 >> 0xe) & 1);
          auVar846._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar852._56_4_;
          bVar12 = SUB81(uVar431 >> 0xf,0);
          auVar846._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar852._60_4_;
          auVar852 = vblendmps_avx512f(auVar716,auVar846);
          bVar12 = (bool)((byte)uVar429 & 1);
          bVar14 = (bool)((byte)(uVar429 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar429 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar429 >> 3) & 1);
          bVar20 = (bool)((byte)(uVar429 >> 4) & 1);
          bVar22 = (bool)((byte)(uVar429 >> 5) & 1);
          bVar24 = (bool)((byte)(uVar429 >> 6) & 1);
          bVar26 = (bool)((byte)(uVar429 >> 7) & 1);
          bVar28 = (bool)((byte)(uVar429 >> 8) & 1);
          bVar31 = (bool)((byte)(uVar429 >> 9) & 1);
          bVar33 = (bool)((byte)(uVar429 >> 10) & 1);
          bVar35 = (bool)((byte)(uVar429 >> 0xb) & 1);
          bVar37 = (bool)((byte)(uVar429 >> 0xc) & 1);
          bVar39 = (bool)((byte)(uVar429 >> 0xd) & 1);
          bVar41 = (bool)((byte)(uVar429 >> 0xe) & 1);
          bVar43 = SUB81(uVar429 >> 0xf,0);
          bVar13 = (bool)((byte)uVar47 & 1);
          bVar15 = (bool)((byte)(uVar47 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar47 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar47 >> 3) & 1);
          bVar21 = (bool)((byte)(uVar47 >> 4) & 1);
          bVar23 = (bool)((byte)(uVar47 >> 5) & 1);
          bVar25 = (bool)((byte)(uVar47 >> 6) & 1);
          bVar27 = (bool)((byte)(uVar47 >> 7) & 1);
          bVar30 = (bool)((byte)(uVar47 >> 8) & 1);
          bVar32 = (bool)((byte)(uVar47 >> 9) & 1);
          bVar34 = (bool)((byte)(uVar47 >> 10) & 1);
          bVar36 = (bool)((byte)(uVar47 >> 0xb) & 1);
          bVar38 = (bool)((byte)(uVar47 >> 0xc) & 1);
          bVar40 = (bool)((byte)(uVar47 >> 0xd) & 1);
          bVar42 = (bool)((byte)(uVar47 >> 0xe) & 1);
          bVar44 = SUB81(uVar47 >> 0xf,0);
          *(uint *)*(undefined1 (*) [64])outptr =
               (uint)bVar13 * ((uint)bVar12 * auVar852._0_4_ | (uint)!bVar12 * auVar737._0_4_) |
               (uint)!bVar13 * (uint)((byte)uVar430 & 1) * auVar1774._0_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
               (uint)bVar15 * ((uint)bVar14 * auVar852._4_4_ | (uint)!bVar14 * auVar737._4_4_) |
               (uint)!bVar15 * (uint)((byte)(uVar430 >> 1) & 1) * auVar1774._4_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
               (uint)bVar17 * ((uint)bVar16 * auVar852._8_4_ | (uint)!bVar16 * auVar737._8_4_) |
               (uint)!bVar17 * (uint)((byte)(uVar430 >> 2) & 1) * auVar1774._8_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
               (uint)bVar19 * ((uint)bVar18 * auVar852._12_4_ | (uint)!bVar18 * auVar737._12_4_) |
               (uint)!bVar19 * (uint)((byte)(uVar430 >> 3) & 1) * auVar1774._12_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x10) =
               (uint)bVar21 * ((uint)bVar20 * auVar852._16_4_ | (uint)!bVar20 * auVar737._16_4_) |
               (uint)!bVar21 * (uint)((byte)(uVar430 >> 4) & 1) * auVar1774._16_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x14) =
               (uint)bVar23 * ((uint)bVar22 * auVar852._20_4_ | (uint)!bVar22 * auVar737._20_4_) |
               (uint)!bVar23 * (uint)((byte)(uVar430 >> 5) & 1) * auVar1774._20_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x18) =
               (uint)bVar25 * ((uint)bVar24 * auVar852._24_4_ | (uint)!bVar24 * auVar737._24_4_) |
               (uint)!bVar25 * (uint)((byte)(uVar430 >> 6) & 1) * auVar1774._24_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x1c) =
               (uint)bVar27 * ((uint)bVar26 * auVar852._28_4_ | (uint)!bVar26 * auVar737._28_4_) |
               (uint)!bVar27 * (uint)((byte)(uVar430 >> 7) & 1) * auVar1774._28_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x20) =
               (uint)bVar30 * ((uint)bVar28 * auVar852._32_4_ | (uint)!bVar28 * auVar737._32_4_) |
               (uint)!bVar30 * (uint)((byte)(uVar430 >> 8) & 1) * auVar1774._32_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x24) =
               (uint)bVar32 * ((uint)bVar31 * auVar852._36_4_ | (uint)!bVar31 * auVar737._36_4_) |
               (uint)!bVar32 * (uint)((byte)(uVar430 >> 9) & 1) * auVar1774._36_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x28) =
               (uint)bVar34 * ((uint)bVar33 * auVar852._40_4_ | (uint)!bVar33 * auVar737._40_4_) |
               (uint)!bVar34 * (uint)((byte)(uVar430 >> 10) & 1) * auVar1774._40_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x2c) =
               (uint)bVar36 * ((uint)bVar35 * auVar852._44_4_ | (uint)!bVar35 * auVar737._44_4_) |
               (uint)!bVar36 * (uint)((byte)(uVar430 >> 0xb) & 1) * auVar1774._44_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x30) =
               (uint)bVar38 * ((uint)bVar37 * auVar852._48_4_ | (uint)!bVar37 * auVar737._48_4_) |
               (uint)!bVar38 * (uint)((byte)(uVar430 >> 0xc) & 1) * auVar1774._48_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x34) =
               (uint)bVar40 * ((uint)bVar39 * auVar852._52_4_ | (uint)!bVar39 * auVar737._52_4_) |
               (uint)!bVar40 * (uint)((byte)(uVar430 >> 0xd) & 1) * auVar1774._52_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x38) =
               (uint)bVar42 * ((uint)bVar41 * auVar852._56_4_ | (uint)!bVar41 * auVar737._56_4_) |
               (uint)!bVar42 * (uint)((byte)(uVar430 >> 0xe) & 1) * auVar1774._56_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x3c) =
               (uint)bVar44 * ((uint)bVar43 * auVar852._60_4_ | (uint)!bVar43 * auVar737._60_4_) |
               (uint)!bVar44 * (uint)(byte)(uVar430 >> 0xf) * auVar1774._60_4_;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
          iVar426 = iVar426 + 2;
        } while (iVar426 < (int)uVar425);
        uVar427 = uVar425 & 0x7ffffffe;
      }
      iVar426 = uVar425 - uVar427;
      if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
        auVar442 = ZEXT816(0) << 0x40;
        auVar196._8_4_ = 0x80000000;
        auVar196._0_8_ = 0x8000000080000000;
        auVar196._12_4_ = 0x80000000;
        auVar196._16_4_ = 0x80000000;
        auVar196._20_4_ = 0x80000000;
        auVar196._24_4_ = 0x80000000;
        auVar196._28_4_ = 0x80000000;
        auVar678 = auVar734._0_32_;
        auVar674 = vpandd_avx512vl(auVar678,auVar196);
        uVar47 = vcmpps_avx512vl(auVar678,ZEXT1632(auVar442),4);
        uVar430 = vcmpps_avx512vl(auVar678,ZEXT1632(auVar442),1);
        auVar677 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
        bVar12 = (bool)((byte)uVar430 & 1);
        auVar662._0_4_ = (uint)bVar12 * auVar677._0_4_ | (uint)!bVar12 * 0x40490fdb;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar662._4_4_ = (uint)bVar12 * auVar677._4_4_ | (uint)!bVar12 * 0x40490fdb;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar662._8_4_ = (uint)bVar12 * auVar677._8_4_ | (uint)!bVar12 * 0x40490fdb;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar662._12_4_ = (uint)bVar12 * auVar677._12_4_ | (uint)!bVar12 * 0x40490fdb;
        bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
        auVar662._16_4_ = (uint)bVar12 * auVar677._16_4_ | (uint)!bVar12 * 0x40490fdb;
        bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
        auVar662._20_4_ = (uint)bVar12 * auVar677._20_4_ | (uint)!bVar12 * 0x40490fdb;
        bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
        auVar662._24_4_ = (uint)bVar12 * auVar677._24_4_ | (uint)!bVar12 * 0x40490fdb;
        bVar12 = SUB81(uVar430 >> 7,0);
        auVar662._28_4_ = (uint)bVar12 * auVar677._28_4_ | (uint)!bVar12 * 0x40490fdb;
        auVar197._8_4_ = 0x3fc90fdb;
        auVar197._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar197._12_4_ = 0x3fc90fdb;
        auVar197._16_4_ = 0x3fc90fdb;
        auVar197._20_4_ = 0x3fc90fdb;
        auVar197._24_4_ = 0x3fc90fdb;
        auVar197._28_4_ = 0x3fc90fdb;
        auVar674 = vpord_avx512vl(auVar674,auVar197);
        auVar663._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar674._4_4_;
        auVar663._0_4_ = (uint)((byte)uVar47 & 1) * auVar674._0_4_;
        auVar663._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar674._8_4_;
        auVar663._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar674._12_4_;
        auVar663._16_4_ = (uint)((byte)(uVar47 >> 4) & 1) * auVar674._16_4_;
        auVar663._20_4_ = (uint)((byte)(uVar47 >> 5) & 1) * auVar674._20_4_;
        auVar663._24_4_ = (uint)((byte)(uVar47 >> 6) & 1) * auVar674._24_4_;
        auVar663._28_4_ = (uint)(byte)(uVar47 >> 7) * auVar674._28_4_;
        auVar1208._8_4_ = 0x80000000;
        auVar1208._0_8_ = 0x8000000080000000;
        auVar1208._12_4_ = 0x80000000;
        auVar1208._16_4_ = 0x80000000;
        auVar1208._20_4_ = 0x80000000;
        auVar1208._24_4_ = 0x80000000;
        auVar1208._28_4_ = 0x80000000;
        auVar1271._8_4_ = 0x7fffffff;
        auVar1271._0_8_ = 0x7fffffff7fffffff;
        auVar1271._12_4_ = 0x7fffffff;
        auVar1271._16_4_ = 0x7fffffff;
        auVar1271._20_4_ = 0x7fffffff;
        auVar1271._24_4_ = 0x7fffffff;
        auVar1271._28_4_ = 0x7fffffff;
        auVar1331._8_4_ = 0x3f800000;
        auVar1331._0_8_ = 0x3f8000003f800000;
        auVar1331._12_4_ = 0x3f800000;
        auVar1331._16_4_ = 0x3f800000;
        auVar1331._20_4_ = 0x3f800000;
        auVar1331._24_4_ = 0x3f800000;
        auVar1331._28_4_ = 0x3f800000;
        auVar1387._8_4_ = 0xbc83a25c;
        auVar1387._0_8_ = 0xbc83a25cbc83a25c;
        auVar1387._12_4_ = 0xbc83a25c;
        auVar1387._16_4_ = 0xbc83a25c;
        auVar1387._20_4_ = 0xbc83a25c;
        auVar1387._24_4_ = 0xbc83a25c;
        auVar1387._28_4_ = 0xbc83a25c;
        auVar1444._8_4_ = 0xbd99b01e;
        auVar1444._0_8_ = 0xbd99b01ebd99b01e;
        auVar1444._12_4_ = 0xbd99b01e;
        auVar1444._16_4_ = 0xbd99b01e;
        auVar1444._20_4_ = 0xbd99b01e;
        auVar1444._24_4_ = 0xbd99b01e;
        auVar1444._28_4_ = 0xbd99b01e;
        auVar1498._8_4_ = 0xbe117200;
        auVar1498._0_8_ = 0xbe117200be117200;
        auVar1498._12_4_ = 0xbe117200;
        auVar1498._16_4_ = 0xbe117200;
        auVar1498._20_4_ = 0xbe117200;
        auVar1498._24_4_ = 0xbe117200;
        auVar1498._28_4_ = 0xbe117200;
        auVar1552._8_4_ = 0xbeaaaa53;
        auVar1552._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1552._12_4_ = 0xbeaaaa53;
        auVar1552._16_4_ = 0xbeaaaa53;
        auVar1552._20_4_ = 0xbeaaaa53;
        auVar1552._24_4_ = 0xbeaaaa53;
        auVar1552._28_4_ = 0xbeaaaa53;
        auVar1606._8_4_ = 0x3b3ac537;
        auVar1606._0_8_ = 0x3b3ac5373b3ac537;
        auVar1606._12_4_ = 0x3b3ac537;
        auVar1606._16_4_ = 0x3b3ac537;
        auVar1606._20_4_ = 0x3b3ac537;
        auVar1606._24_4_ = 0x3b3ac537;
        auVar1606._28_4_ = 0x3b3ac537;
        auVar1660._8_4_ = 0x3d2edd4e;
        auVar1660._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1660._12_4_ = 0x3d2edd4e;
        auVar1660._16_4_ = 0x3d2edd4e;
        auVar1660._20_4_ = 0x3d2edd4e;
        auVar1660._24_4_ = 0x3d2edd4e;
        auVar1660._28_4_ = 0x3d2edd4e;
        auVar1714._8_4_ = 0x3dd9ed24;
        auVar1714._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1714._12_4_ = 0x3dd9ed24;
        auVar1714._16_4_ = 0x3dd9ed24;
        auVar1714._20_4_ = 0x3dd9ed24;
        auVar1714._24_4_ = 0x3dd9ed24;
        auVar1714._28_4_ = 0x3dd9ed24;
        auVar1764._8_4_ = 0x3e4cb974;
        auVar1764._0_8_ = 0x3e4cb9743e4cb974;
        auVar1764._12_4_ = 0x3e4cb974;
        auVar1764._16_4_ = 0x3e4cb974;
        auVar1764._20_4_ = 0x3e4cb974;
        auVar1764._24_4_ = 0x3e4cb974;
        auVar1764._28_4_ = 0x3e4cb974;
        auVar1814._8_4_ = 0x3fc90fdb;
        auVar1814._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1814._12_4_ = 0x3fc90fdb;
        auVar1814._16_4_ = 0x3fc90fdb;
        auVar1814._20_4_ = 0x3fc90fdb;
        auVar1814._24_4_ = 0x3fc90fdb;
        auVar1814._28_4_ = 0x3fc90fdb;
        auVar674 = vpbroadcastd_avx512vl(ZEXT416(0x40490fdb));
        auVar677 = vpord_avx512vl(auVar663,auVar674);
        do {
          auVar562 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          auVar460 = vdivss_avx512f(ZEXT416(0x3f800000),auVar562._0_16_);
          auVar679 = vbroadcastss_avx512vl(auVar460);
          auVar679 = vmulps_avx512vl(auVar678,auVar679);
          in_ZMM20 = ZEXT3264(auVar679);
          vandps_avx512vl(auVar679,auVar1271);
          uVar430 = vcmpps_avx512vl(auVar1331,auVar679,1);
          auVar198._8_4_ = 0xbf800000;
          auVar198._0_8_ = 0xbf800000bf800000;
          auVar198._12_4_ = 0xbf800000;
          auVar198._16_4_ = 0xbf800000;
          auVar198._20_4_ = 0xbf800000;
          auVar198._24_4_ = 0xbf800000;
          auVar198._28_4_ = 0xbf800000;
          auVar680 = vblendmps_avx512vl(auVar679,auVar198);
          bVar29 = (byte)uVar430;
          auVar664._0_4_ =
               (uint)(bVar29 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM22._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar664._4_4_ = (uint)bVar12 * auVar680._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar664._8_4_ = (uint)bVar12 * auVar680._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar664._12_4_ = (uint)bVar12 * auVar680._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar664._16_4_ = (uint)bVar12 * auVar680._16_4_ | (uint)!bVar12 * in_ZMM22._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar664._20_4_ = (uint)bVar12 * auVar680._20_4_ | (uint)!bVar12 * in_ZMM22._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar664._24_4_ = (uint)bVar12 * auVar680._24_4_ | (uint)!bVar12 * in_ZMM22._24_4_;
          bVar12 = SUB81(uVar430 >> 7,0);
          auVar664._28_4_ = (uint)bVar12 * auVar680._28_4_ | (uint)!bVar12 * in_ZMM22._28_4_;
          auVar680 = vdivps_avx512vl(auVar664,auVar679);
          auVar665._0_4_ =
               (uint)(bVar29 & 1) * auVar680._0_4_ | !(bool)(bVar29 & 1) * auVar664._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar665._4_4_ = (uint)bVar12 * auVar680._4_4_ | !bVar12 * auVar664._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar665._8_4_ = (uint)bVar12 * auVar680._8_4_ | !bVar12 * auVar664._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar665._12_4_ = (uint)bVar12 * auVar680._12_4_ | !bVar12 * auVar664._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar665._16_4_ = (uint)bVar12 * auVar680._16_4_ | !bVar12 * auVar664._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar665._20_4_ = (uint)bVar12 * auVar680._20_4_ | !bVar12 * auVar664._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar665._24_4_ = (uint)bVar12 * auVar680._24_4_ | !bVar12 * auVar664._24_4_;
          bVar12 = SUB81(uVar430 >> 7,0);
          auVar665._28_4_ = (uint)bVar12 * auVar680._28_4_ | !bVar12 * auVar664._28_4_;
          in_ZMM22 = ZEXT3264(auVar665);
          auVar701 = ZEXT1632(auVar442);
          uVar429 = vcmpps_avx512vl(auVar562,auVar701,4);
          uVar429 = uVar47 & uVar429;
          auVar680 = vmulps_avx512vl(auVar665,auVar665);
          auVar683 = vmulps_avx512vl(auVar680,auVar680);
          uVar431 = vcmpps_avx512vl(auVar562,auVar701,1);
          auVar684 = vfmadd213ps_avx512vl(auVar1387,auVar683,auVar1444);
          auVar684 = vfmadd213ps_avx512vl(auVar684,auVar683,auVar1498);
          auVar685 = vfmadd213ps_avx512vl(auVar1606,auVar683,auVar1660);
          auVar685 = vfmadd213ps_avx512vl(auVar685,auVar683,auVar1714);
          auVar685 = vfmadd213ps_avx512vl(auVar685,auVar683,auVar1764);
          auVar684 = vfmadd213ps_avx512vl(auVar684,auVar683,auVar1552);
          auVar683 = vfmadd213ps_avx512vl(auVar685,auVar683,auVar1331);
          auVar680 = vfmadd231ps_avx512vl(auVar683,auVar680,auVar684);
          auVar680 = vmulps_avx512vl(auVar680,auVar665);
          auVar683 = vaddps_avx512vl(auVar680,auVar1814);
          auVar666._0_4_ =
               (uint)(bVar29 & 1) * auVar683._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar680._0_4_;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar666._4_4_ = (uint)bVar12 * auVar683._4_4_ | (uint)!bVar12 * auVar680._4_4_;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar666._8_4_ = (uint)bVar12 * auVar683._8_4_ | (uint)!bVar12 * auVar680._8_4_;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar666._12_4_ = (uint)bVar12 * auVar683._12_4_ | (uint)!bVar12 * auVar680._12_4_;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar666._16_4_ = (uint)bVar12 * auVar683._16_4_ | (uint)!bVar12 * auVar680._16_4_;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar666._20_4_ = (uint)bVar12 * auVar683._20_4_ | (uint)!bVar12 * auVar680._20_4_;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar666._24_4_ = (uint)bVar12 * auVar683._24_4_ | (uint)!bVar12 * auVar680._24_4_;
          bVar12 = SUB81(uVar430 >> 7,0);
          auVar666._28_4_ = (uint)bVar12 * auVar683._28_4_ | (uint)!bVar12 * auVar680._28_4_;
          auVar679 = vpternlogd_avx512vl(auVar666,auVar679,auVar1208,0xf8);
          auVar562 = vpternlogd_avx512vl(auVar562,auVar674,auVar1208,0xec);
          uVar46 = vcmpps_avx512vl(auVar701,auVar562,2);
          auVar680 = vaddps_avx512vl(auVar679,auVar662);
          bVar12 = (bool)((byte)uVar431 & 1);
          bVar14 = (bool)((byte)(uVar431 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar431 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar431 >> 3) & 1);
          bVar23 = (bool)((byte)(uVar431 >> 4) & 1);
          bVar26 = (bool)((byte)(uVar431 >> 5) & 1);
          bVar30 = (bool)((byte)(uVar431 >> 6) & 1);
          bVar33 = SUB81(uVar431 >> 7,0);
          bVar29 = (byte)uVar47 | (byte)uVar46;
          auVar683 = vpblendmd_avx512vl(auVar677,auVar663);
          bVar15 = (bool)(bVar29 >> 1 & 1);
          bVar18 = (bool)(bVar29 >> 2 & 1);
          bVar21 = (bool)(bVar29 >> 3 & 1);
          bVar24 = (bool)(bVar29 >> 4 & 1);
          bVar27 = (bool)(bVar29 >> 5 & 1);
          bVar31 = (bool)(bVar29 >> 6 & 1);
          bVar13 = (bool)((byte)uVar429 & 1);
          bVar16 = (bool)((byte)(uVar429 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar429 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar429 >> 3) & 1);
          bVar25 = (bool)((byte)(uVar429 >> 4) & 1);
          bVar28 = (bool)((byte)(uVar429 >> 5) & 1);
          bVar32 = (bool)((byte)(uVar429 >> 6) & 1);
          bVar34 = SUB81(uVar429 >> 7,0);
          *(uint *)*(undefined1 (*) [64])outptr =
               (uint)bVar13 * ((uint)bVar12 * auVar680._0_4_ | (uint)!bVar12 * auVar679._0_4_) |
               (uint)!bVar13 *
               ((uint)(bVar29 & 1) * auVar683._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar562._0_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
               (uint)bVar16 * ((uint)bVar14 * auVar680._4_4_ | (uint)!bVar14 * auVar679._4_4_) |
               (uint)!bVar16 * ((uint)bVar15 * auVar683._4_4_ | (uint)!bVar15 * auVar562._4_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
               (uint)bVar19 * ((uint)bVar17 * auVar680._8_4_ | (uint)!bVar17 * auVar679._8_4_) |
               (uint)!bVar19 * ((uint)bVar18 * auVar683._8_4_ | (uint)!bVar18 * auVar562._8_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
               (uint)bVar22 * ((uint)bVar20 * auVar680._12_4_ | (uint)!bVar20 * auVar679._12_4_) |
               (uint)!bVar22 * ((uint)bVar21 * auVar683._12_4_ | (uint)!bVar21 * auVar562._12_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x10) =
               (uint)bVar25 * ((uint)bVar23 * auVar680._16_4_ | (uint)!bVar23 * auVar679._16_4_) |
               (uint)!bVar25 * ((uint)bVar24 * auVar683._16_4_ | (uint)!bVar24 * auVar562._16_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x14) =
               (uint)bVar28 * ((uint)bVar26 * auVar680._20_4_ | (uint)!bVar26 * auVar679._20_4_) |
               (uint)!bVar28 * ((uint)bVar27 * auVar683._20_4_ | (uint)!bVar27 * auVar562._20_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x18) =
               (uint)bVar32 * ((uint)bVar30 * auVar680._24_4_ | (uint)!bVar30 * auVar679._24_4_) |
               (uint)!bVar32 * ((uint)bVar31 * auVar683._24_4_ | (uint)!bVar31 * auVar562._24_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x1c) =
               (uint)bVar34 * ((uint)bVar33 * auVar680._28_4_ | (uint)!bVar33 * auVar679._28_4_) |
               (uint)!bVar34 *
               ((uint)(bVar29 >> 7) * auVar683._28_4_ | (uint)!(bool)(bVar29 >> 7) * auVar562._28_4_
               );
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          iVar426 = iVar426 + -1;
        } while (iVar426 != 0);
      }
    }
    if (iVar424 != 4) {
      return;
    }
    auVar734 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
    auVar667 = auVar734._0_32_;
    uVar427 = 0;
    if (3 < (int)uVar425) {
      auVar730 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar47 = vcmpps_avx512f(auVar734,auVar730,1);
      auVar716 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar717 = vbroadcastss_avx512f(ZEXT416(0xc0490fdb));
      bVar12 = (bool)((byte)uVar47 & 1);
      auVar847._0_4_ = (uint)bVar12 * auVar717._0_4_ | (uint)!bVar12 * auVar716._0_4_;
      bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
      auVar847._4_4_ = (uint)bVar12 * auVar717._4_4_ | (uint)!bVar12 * auVar716._4_4_;
      bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
      auVar847._8_4_ = (uint)bVar12 * auVar717._8_4_ | (uint)!bVar12 * auVar716._8_4_;
      bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar847._12_4_ = (uint)bVar12 * auVar717._12_4_ | (uint)!bVar12 * auVar716._12_4_;
      bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
      auVar847._16_4_ = (uint)bVar12 * auVar717._16_4_ | (uint)!bVar12 * auVar716._16_4_;
      bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
      auVar847._20_4_ = (uint)bVar12 * auVar717._20_4_ | (uint)!bVar12 * auVar716._20_4_;
      bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
      auVar847._24_4_ = (uint)bVar12 * auVar717._24_4_ | (uint)!bVar12 * auVar716._24_4_;
      bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
      auVar847._28_4_ = (uint)bVar12 * auVar717._28_4_ | (uint)!bVar12 * auVar716._28_4_;
      bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
      auVar847._32_4_ = (uint)bVar12 * auVar717._32_4_ | (uint)!bVar12 * auVar716._32_4_;
      bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
      auVar847._36_4_ = (uint)bVar12 * auVar717._36_4_ | (uint)!bVar12 * auVar716._36_4_;
      bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
      auVar847._40_4_ = (uint)bVar12 * auVar717._40_4_ | (uint)!bVar12 * auVar716._40_4_;
      bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
      auVar847._44_4_ = (uint)bVar12 * auVar717._44_4_ | (uint)!bVar12 * auVar716._44_4_;
      bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
      auVar847._48_4_ = (uint)bVar12 * auVar717._48_4_ | (uint)!bVar12 * auVar716._48_4_;
      bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
      auVar847._52_4_ = (uint)bVar12 * auVar717._52_4_ | (uint)!bVar12 * auVar716._52_4_;
      bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
      auVar847._56_4_ = (uint)bVar12 * auVar717._56_4_ | (uint)!bVar12 * auVar716._56_4_;
      bVar12 = SUB81(uVar47 >> 0xf,0);
      auVar847._60_4_ = (uint)bVar12 * auVar717._60_4_ | (uint)!bVar12 * auVar716._60_4_;
      auVar716 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      auVar356._8_4_ = 0x80000000;
      auVar356._0_8_ = 0x8000000080000000;
      auVar356._12_4_ = 0x80000000;
      auVar356._16_4_ = 0x80000000;
      auVar356._20_4_ = 0x80000000;
      auVar356._24_4_ = 0x80000000;
      auVar356._28_4_ = 0x80000000;
      auVar356._32_4_ = 0x80000000;
      auVar356._36_4_ = 0x80000000;
      auVar356._40_4_ = 0x80000000;
      auVar356._44_4_ = 0x80000000;
      auVar356._48_4_ = 0x80000000;
      auVar356._52_4_ = 0x80000000;
      auVar356._56_4_ = 0x80000000;
      auVar356._60_4_ = 0x80000000;
      auVar716 = vpternlogd_avx512f(auVar716,auVar734,auVar356,0xf8);
      iVar424 = 3;
      uVar47 = vcmpps_avx512f(auVar734,auVar730,4);
      auVar717 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar718 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar719 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar720 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar721 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar722 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar723 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar724 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar725 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar726 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar727 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar728 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar729 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      do {
        auVar442 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[2]));
        auVar460 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[3]));
        auVar461 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
        auVar674 = vinsertf32x4_avx512vl(ZEXT1632(auVar442),auVar460,1);
        auVar442 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
        auVar677 = vinsertf32x4_avx512vl(ZEXT1632(auVar461),auVar442,1);
        auVar1774 = vinsertf64x4_avx512f(ZEXT3264(auVar677),auVar674,1);
        auVar737 = vdivps_avx512f(auVar734,auVar1774);
        auVar852 = vandps_avx512dq(auVar737,auVar718);
        uVar430 = vcmpps_avx512f(auVar719,auVar852,1);
        auVar357._8_4_ = 0xbf800000;
        auVar357._0_8_ = 0xbf800000bf800000;
        auVar357._12_4_ = 0xbf800000;
        auVar357._16_4_ = 0xbf800000;
        auVar357._20_4_ = 0xbf800000;
        auVar357._24_4_ = 0xbf800000;
        auVar357._28_4_ = 0xbf800000;
        auVar357._32_4_ = 0xbf800000;
        auVar357._36_4_ = 0xbf800000;
        auVar357._40_4_ = 0xbf800000;
        auVar357._44_4_ = 0xbf800000;
        auVar357._48_4_ = 0xbf800000;
        auVar357._52_4_ = 0xbf800000;
        auVar357._56_4_ = 0xbf800000;
        auVar357._60_4_ = 0xbf800000;
        auVar733 = vblendmps_avx512f(auVar852,auVar357);
        bVar12 = (bool)((byte)uVar430 & 1);
        auVar848._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * in_ZMM20._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar848._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * in_ZMM20._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar848._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * in_ZMM20._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar848._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * in_ZMM20._12_4_;
        bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
        auVar848._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * in_ZMM20._16_4_;
        bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
        auVar848._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * in_ZMM20._20_4_;
        bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
        auVar848._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * in_ZMM20._24_4_;
        bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
        auVar848._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * in_ZMM20._28_4_;
        bVar29 = (byte)(uVar430 >> 8);
        bVar12 = (bool)(bVar29 & 1);
        auVar848._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * in_ZMM20._32_4_;
        bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
        auVar848._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * in_ZMM20._36_4_;
        bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
        auVar848._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * in_ZMM20._40_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
        auVar848._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * in_ZMM20._44_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
        auVar848._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * in_ZMM20._48_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
        auVar848._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * in_ZMM20._52_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
        auVar848._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * in_ZMM20._56_4_;
        bVar12 = SUB81(uVar430 >> 0xf,0);
        auVar848._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * in_ZMM20._60_4_;
        auVar852 = vmaxps_avx512f(auVar852,auVar719);
        auVar852 = vdivps_avx512f(auVar848,auVar852);
        in_ZMM20 = vmulps_avx512f(auVar852,auVar852);
        uVar429 = vcmpps_avx512f(auVar1774,auVar730,4);
        auVar733 = vmulps_avx512f(in_ZMM20,in_ZMM20);
        auVar736 = vfmadd213ps_avx512f(auVar720,auVar733,auVar721);
        auVar736 = vfmadd213ps_avx512f(auVar736,auVar733,auVar722);
        auVar731 = vfmadd213ps_avx512f(auVar724,auVar733,auVar725);
        auVar731 = vfmadd213ps_avx512f(auVar731,auVar733,auVar726);
        in_ZMM22 = vfmadd213ps_avx512f(auVar736,auVar733,auVar723);
        auVar736 = vfmadd213ps_avx512f(auVar731,auVar733,auVar727);
        auVar733 = vfmadd213ps_avx512f(auVar736,auVar733,auVar719);
        auVar733 = vfmadd231ps_avx512f(auVar733,in_ZMM20,in_ZMM22);
        uVar431 = vcmpps_avx512f(auVar1774,auVar730,1);
        auVar852 = vmulps_avx512f(auVar733,auVar852);
        auVar733 = vaddps_avx512f(auVar852,auVar728);
        bVar12 = (bool)((byte)uVar430 & 1);
        auVar849._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar852._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar849._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar852._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar849._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar852._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar849._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar852._12_4_;
        bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
        auVar849._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar852._16_4_;
        bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
        auVar849._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar852._20_4_;
        bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
        auVar849._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar852._24_4_;
        bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
        auVar849._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar852._28_4_;
        bVar12 = (bool)(bVar29 & 1);
        auVar849._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar852._32_4_;
        bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
        auVar849._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar852._36_4_;
        bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
        auVar849._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar852._40_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
        auVar849._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar852._44_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
        auVar849._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar852._48_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
        auVar849._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar852._52_4_;
        bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
        auVar849._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar852._56_4_;
        bVar12 = SUB81(uVar430 >> 0xf,0);
        auVar849._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar852._60_4_;
        auVar1774 = vpternlogd_avx512f(auVar1774,auVar717,auVar729,0xea);
        auVar852 = vpternlogd_avx512f(auVar849,auVar737,auVar717,0xf8);
        uVar430 = vcmpps_avx512f(auVar1774,auVar730,1);
        auVar1774 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar733 = vaddps_avx512f(auVar852,auVar847);
        bVar12 = (bool)((byte)uVar431 & 1);
        auVar850._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar852._0_4_;
        bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
        auVar850._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar852._4_4_;
        bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
        auVar850._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar852._8_4_;
        bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
        auVar850._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar852._12_4_;
        bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
        auVar850._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar852._16_4_;
        bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
        auVar850._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar852._20_4_;
        bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
        auVar850._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar852._24_4_;
        bVar12 = (bool)((byte)(uVar431 >> 7) & 1);
        auVar850._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar852._28_4_;
        bVar12 = (bool)((byte)(uVar431 >> 8) & 1);
        auVar850._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar852._32_4_;
        bVar12 = (bool)((byte)(uVar431 >> 9) & 1);
        auVar850._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar852._36_4_;
        bVar12 = (bool)((byte)(uVar431 >> 10) & 1);
        auVar850._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar852._40_4_;
        bVar12 = (bool)((byte)(uVar431 >> 0xb) & 1);
        auVar850._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar852._44_4_;
        bVar12 = (bool)((byte)(uVar431 >> 0xc) & 1);
        auVar850._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar852._48_4_;
        bVar12 = (bool)((byte)(uVar431 >> 0xd) & 1);
        auVar850._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar852._52_4_;
        bVar12 = (bool)((byte)(uVar431 >> 0xe) & 1);
        auVar850._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar852._56_4_;
        bVar12 = SUB81(uVar431 >> 0xf,0);
        auVar850._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar852._60_4_;
        auVar852 = vblendmps_avx512f(auVar716,auVar850);
        bVar12 = (bool)((byte)uVar429 & 1);
        bVar14 = (bool)((byte)(uVar429 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar429 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar429 >> 3) & 1);
        bVar17 = (bool)((byte)(uVar429 >> 4) & 1);
        bVar18 = (bool)((byte)(uVar429 >> 5) & 1);
        bVar19 = (bool)((byte)(uVar429 >> 6) & 1);
        bVar20 = (bool)((byte)(uVar429 >> 7) & 1);
        bVar21 = (bool)((byte)(uVar429 >> 8) & 1);
        bVar22 = (bool)((byte)(uVar429 >> 9) & 1);
        bVar23 = (bool)((byte)(uVar429 >> 10) & 1);
        bVar24 = (bool)((byte)(uVar429 >> 0xb) & 1);
        bVar25 = (bool)((byte)(uVar429 >> 0xc) & 1);
        bVar26 = (bool)((byte)(uVar429 >> 0xd) & 1);
        bVar27 = (bool)((byte)(uVar429 >> 0xe) & 1);
        bVar28 = SUB81(uVar429 >> 0xf,0);
        bVar13 = (bool)((byte)uVar47 & 1);
        auVar667._0_4_ =
             (uint)bVar13 * ((uint)bVar12 * auVar852._0_4_ | (uint)!bVar12 * auVar737._0_4_) |
             (uint)!bVar13 * (uint)((byte)uVar430 & 1) * auVar1774._0_4_;
        bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
        auVar667._4_4_ =
             (uint)bVar12 * ((uint)bVar14 * auVar852._4_4_ | (uint)!bVar14 * auVar737._4_4_) |
             (uint)!bVar12 * (uint)((byte)(uVar430 >> 1) & 1) * auVar1774._4_4_;
        bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
        auVar667._8_4_ =
             (uint)bVar12 * ((uint)bVar15 * auVar852._8_4_ | (uint)!bVar15 * auVar737._8_4_) |
             (uint)!bVar12 * (uint)((byte)(uVar430 >> 2) & 1) * auVar1774._8_4_;
        bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
        auVar667._12_4_ =
             (uint)bVar12 * ((uint)bVar16 * auVar852._12_4_ | (uint)!bVar16 * auVar737._12_4_) |
             (uint)!bVar12 * (uint)((byte)(uVar430 >> 3) & 1) * auVar1774._12_4_;
        bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
        auVar667._16_4_ =
             (uint)bVar12 * ((uint)bVar17 * auVar852._16_4_ | (uint)!bVar17 * auVar737._16_4_) |
             (uint)!bVar12 * (uint)((byte)(uVar430 >> 4) & 1) * auVar1774._16_4_;
        bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
        auVar667._20_4_ =
             (uint)bVar12 * ((uint)bVar18 * auVar852._20_4_ | (uint)!bVar18 * auVar737._20_4_) |
             (uint)!bVar12 * (uint)((byte)(uVar430 >> 5) & 1) * auVar1774._20_4_;
        bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
        auVar667._24_4_ =
             (uint)bVar12 * ((uint)bVar19 * auVar852._24_4_ | (uint)!bVar19 * auVar737._24_4_) |
             (uint)!bVar12 * (uint)((byte)(uVar430 >> 6) & 1) * auVar1774._24_4_;
        bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
        auVar667._28_4_ =
             (uint)bVar12 * ((uint)bVar20 * auVar852._28_4_ | (uint)!bVar20 * auVar737._28_4_) |
             (uint)!bVar12 * (uint)((byte)(uVar430 >> 7) & 1) * auVar1774._28_4_;
        bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
        auVar851._32_4_ =
             (uint)bVar12 * ((uint)bVar21 * auVar852._32_4_ | (uint)!bVar21 * auVar737._32_4_) |
             (uint)!bVar12 * (uint)((byte)(uVar430 >> 8) & 1) * auVar1774._32_4_;
        auVar851._0_32_ = auVar667;
        bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
        auVar851._36_4_ =
             (uint)bVar12 * ((uint)bVar22 * auVar852._36_4_ | (uint)!bVar22 * auVar737._36_4_) |
             (uint)!bVar12 * (uint)((byte)(uVar430 >> 9) & 1) * auVar1774._36_4_;
        bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
        auVar851._40_4_ =
             (uint)bVar12 * ((uint)bVar23 * auVar852._40_4_ | (uint)!bVar23 * auVar737._40_4_) |
             (uint)!bVar12 * (uint)((byte)(uVar430 >> 10) & 1) * auVar1774._40_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
        auVar851._44_4_ =
             (uint)bVar12 * ((uint)bVar24 * auVar852._44_4_ | (uint)!bVar24 * auVar737._44_4_) |
             (uint)!bVar12 * (uint)((byte)(uVar430 >> 0xb) & 1) * auVar1774._44_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
        auVar851._48_4_ =
             (uint)bVar12 * ((uint)bVar25 * auVar852._48_4_ | (uint)!bVar25 * auVar737._48_4_) |
             (uint)!bVar12 * (uint)((byte)(uVar430 >> 0xc) & 1) * auVar1774._48_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
        auVar851._52_4_ =
             (uint)bVar12 * ((uint)bVar26 * auVar852._52_4_ | (uint)!bVar26 * auVar737._52_4_) |
             (uint)!bVar12 * (uint)((byte)(uVar430 >> 0xd) & 1) * auVar1774._52_4_;
        bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
        auVar851._56_4_ =
             (uint)bVar12 * ((uint)bVar27 * auVar852._56_4_ | (uint)!bVar27 * auVar737._56_4_) |
             (uint)!bVar12 * (uint)((byte)(uVar430 >> 0xe) & 1) * auVar1774._56_4_;
        bVar12 = SUB81(uVar47 >> 0xf,0);
        auVar851._60_4_ =
             (uint)bVar12 * ((uint)bVar28 * auVar852._60_4_ | (uint)!bVar28 * auVar737._60_4_) |
             (uint)!bVar12 * (uint)(byte)(uVar430 >> 0xf) * auVar1774._60_4_;
        *(undefined1 (*) [64])outptr = auVar851;
        ptr1 = ptr1 + 4;
        outptr = (float *)((long)outptr + 0x40);
        iVar424 = iVar424 + 4;
      } while (iVar424 < (int)uVar425);
      uVar427 = uVar425 & 0x7ffffffc;
    }
    auVar442 = auVar734._0_16_;
    if ((int)(uVar427 | 1) < (int)uVar425) {
      auVar1022._16_16_ = auVar442;
      auVar1022._0_16_ = auVar442;
      auVar460 = ZEXT816(0) << 0x40;
      auVar199._8_4_ = 0x80000000;
      auVar199._0_8_ = 0x8000000080000000;
      auVar199._12_4_ = 0x80000000;
      auVar199._16_4_ = 0x80000000;
      auVar199._20_4_ = 0x80000000;
      auVar199._24_4_ = 0x80000000;
      auVar199._28_4_ = 0x80000000;
      vandps_avx512vl(auVar1022,auVar199);
      uVar47 = vcmpps_avx512vl(auVar1022,ZEXT1632(auVar460),4);
      uVar430 = vcmpps_avx512vl(auVar1022,ZEXT1632(auVar460),1);
      auVar674 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
      bVar12 = (bool)((byte)uVar430 & 1);
      auVar668._0_4_ = (uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * 0x40490fdb;
      bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
      auVar668._4_4_ = (uint)bVar12 * auVar674._4_4_ | (uint)!bVar12 * 0x40490fdb;
      bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
      auVar668._8_4_ = (uint)bVar12 * auVar674._8_4_ | (uint)!bVar12 * 0x40490fdb;
      bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
      auVar668._12_4_ = (uint)bVar12 * auVar674._12_4_ | (uint)!bVar12 * 0x40490fdb;
      bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
      auVar668._16_4_ = (uint)bVar12 * auVar674._16_4_ | (uint)!bVar12 * 0x40490fdb;
      bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
      auVar668._20_4_ = (uint)bVar12 * auVar674._20_4_ | (uint)!bVar12 * 0x40490fdb;
      bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
      auVar668._24_4_ = (uint)bVar12 * auVar674._24_4_ | (uint)!bVar12 * 0x40490fdb;
      bVar12 = SUB81(uVar430 >> 7,0);
      auVar668._28_4_ = (uint)bVar12 * auVar674._28_4_ | (uint)!bVar12 * 0x40490fdb;
      auVar200._8_4_ = 0x3fc90fdb;
      auVar200._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar200._12_4_ = 0x3fc90fdb;
      auVar200._16_4_ = 0x3fc90fdb;
      auVar200._20_4_ = 0x3fc90fdb;
      auVar200._24_4_ = 0x3fc90fdb;
      auVar200._28_4_ = 0x3fc90fdb;
      auVar674 = vorps_avx512vl(auVar667,auVar200);
      auVar669._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar674._4_4_;
      auVar669._0_4_ = (uint)((byte)uVar47 & 1) * auVar674._0_4_;
      auVar669._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar674._8_4_;
      auVar669._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar674._12_4_;
      auVar669._16_4_ = (uint)((byte)(uVar47 >> 4) & 1) * auVar674._16_4_;
      auVar669._20_4_ = (uint)((byte)(uVar47 >> 5) & 1) * auVar674._20_4_;
      auVar669._24_4_ = (uint)((byte)(uVar47 >> 6) & 1) * auVar674._24_4_;
      auVar669._28_4_ = (uint)(byte)(uVar47 >> 7) * auVar674._28_4_;
      auVar1272._8_4_ = 0x80000000;
      auVar1272._0_8_ = 0x8000000080000000;
      auVar1272._12_4_ = 0x80000000;
      auVar1272._16_4_ = 0x80000000;
      auVar1272._20_4_ = 0x80000000;
      auVar1272._24_4_ = 0x80000000;
      auVar1272._28_4_ = 0x80000000;
      auVar1332._8_4_ = 0x7fffffff;
      auVar1332._0_8_ = 0x7fffffff7fffffff;
      auVar1332._12_4_ = 0x7fffffff;
      auVar1332._16_4_ = 0x7fffffff;
      auVar1332._20_4_ = 0x7fffffff;
      auVar1332._24_4_ = 0x7fffffff;
      auVar1332._28_4_ = 0x7fffffff;
      auVar1388._8_4_ = 0x3f800000;
      auVar1388._0_8_ = 0x3f8000003f800000;
      auVar1388._12_4_ = 0x3f800000;
      auVar1388._16_4_ = 0x3f800000;
      auVar1388._20_4_ = 0x3f800000;
      auVar1388._24_4_ = 0x3f800000;
      auVar1388._28_4_ = 0x3f800000;
      auVar1445._8_4_ = 0xbc83a25c;
      auVar1445._0_8_ = 0xbc83a25cbc83a25c;
      auVar1445._12_4_ = 0xbc83a25c;
      auVar1445._16_4_ = 0xbc83a25c;
      auVar1445._20_4_ = 0xbc83a25c;
      auVar1445._24_4_ = 0xbc83a25c;
      auVar1445._28_4_ = 0xbc83a25c;
      auVar1499._8_4_ = 0xbd99b01e;
      auVar1499._0_8_ = 0xbd99b01ebd99b01e;
      auVar1499._12_4_ = 0xbd99b01e;
      auVar1499._16_4_ = 0xbd99b01e;
      auVar1499._20_4_ = 0xbd99b01e;
      auVar1499._24_4_ = 0xbd99b01e;
      auVar1499._28_4_ = 0xbd99b01e;
      auVar1553._8_4_ = 0xbe117200;
      auVar1553._0_8_ = 0xbe117200be117200;
      auVar1553._12_4_ = 0xbe117200;
      auVar1553._16_4_ = 0xbe117200;
      auVar1553._20_4_ = 0xbe117200;
      auVar1553._24_4_ = 0xbe117200;
      auVar1553._28_4_ = 0xbe117200;
      auVar1607._8_4_ = 0xbeaaaa53;
      auVar1607._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1607._12_4_ = 0xbeaaaa53;
      auVar1607._16_4_ = 0xbeaaaa53;
      auVar1607._20_4_ = 0xbeaaaa53;
      auVar1607._24_4_ = 0xbeaaaa53;
      auVar1607._28_4_ = 0xbeaaaa53;
      auVar1661._8_4_ = 0x3b3ac537;
      auVar1661._0_8_ = 0x3b3ac5373b3ac537;
      auVar1661._12_4_ = 0x3b3ac537;
      auVar1661._16_4_ = 0x3b3ac537;
      auVar1661._20_4_ = 0x3b3ac537;
      auVar1661._24_4_ = 0x3b3ac537;
      auVar1661._28_4_ = 0x3b3ac537;
      auVar1715._8_4_ = 0x3d2edd4e;
      auVar1715._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1715._12_4_ = 0x3d2edd4e;
      auVar1715._16_4_ = 0x3d2edd4e;
      auVar1715._20_4_ = 0x3d2edd4e;
      auVar1715._24_4_ = 0x3d2edd4e;
      auVar1715._28_4_ = 0x3d2edd4e;
      auVar1765._8_4_ = 0x3dd9ed24;
      auVar1765._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1765._12_4_ = 0x3dd9ed24;
      auVar1765._16_4_ = 0x3dd9ed24;
      auVar1765._20_4_ = 0x3dd9ed24;
      auVar1765._24_4_ = 0x3dd9ed24;
      auVar1765._28_4_ = 0x3dd9ed24;
      auVar1815._8_4_ = 0x3e4cb974;
      auVar1815._0_8_ = 0x3e4cb9743e4cb974;
      auVar1815._12_4_ = 0x3e4cb974;
      auVar1815._16_4_ = 0x3e4cb974;
      auVar1815._20_4_ = 0x3e4cb974;
      auVar1815._24_4_ = 0x3e4cb974;
      auVar1815._28_4_ = 0x3e4cb974;
      auVar674 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
      auVar677 = vbroadcastss_avx512vl(ZEXT416(0x40490fdb));
      auVar678 = vorps_avx512vl(auVar669,auVar677);
      uVar882 = uVar427;
      do {
        auVar461 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
        auVar519 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
        auVar562 = vinsertf32x4_avx512vl(ZEXT1632(auVar461),auVar519,1);
        auVar679 = vdivps_avx512vl(auVar1022,auVar562);
        vandps_avx512vl(auVar679,auVar1332);
        uVar430 = vcmpps_avx512vl(auVar1388,auVar679,1);
        auVar201._8_4_ = 0xbf800000;
        auVar201._0_8_ = 0xbf800000bf800000;
        auVar201._12_4_ = 0xbf800000;
        auVar201._16_4_ = 0xbf800000;
        auVar201._20_4_ = 0xbf800000;
        auVar201._24_4_ = 0xbf800000;
        auVar201._28_4_ = 0xbf800000;
        auVar680 = vblendmps_avx512vl(auVar679,auVar201);
        bVar29 = (byte)uVar430;
        auVar670._0_4_ =
             (uint)(bVar29 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM22._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar670._4_4_ = (uint)bVar12 * auVar680._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar670._8_4_ = (uint)bVar12 * auVar680._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar670._12_4_ = (uint)bVar12 * auVar680._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
        bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
        auVar670._16_4_ = (uint)bVar12 * auVar680._16_4_ | (uint)!bVar12 * in_ZMM22._16_4_;
        bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
        auVar670._20_4_ = (uint)bVar12 * auVar680._20_4_ | (uint)!bVar12 * in_ZMM22._20_4_;
        bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
        auVar670._24_4_ = (uint)bVar12 * auVar680._24_4_ | (uint)!bVar12 * in_ZMM22._24_4_;
        bVar12 = SUB81(uVar430 >> 7,0);
        auVar670._28_4_ = (uint)bVar12 * auVar680._28_4_ | (uint)!bVar12 * in_ZMM22._28_4_;
        auVar680 = vdivps_avx512vl(auVar670,auVar679);
        auVar671._0_4_ = (uint)(bVar29 & 1) * auVar680._0_4_ | !(bool)(bVar29 & 1) * auVar670._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar671._4_4_ = (uint)bVar12 * auVar680._4_4_ | !bVar12 * auVar670._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar671._8_4_ = (uint)bVar12 * auVar680._8_4_ | !bVar12 * auVar670._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar671._12_4_ = (uint)bVar12 * auVar680._12_4_ | !bVar12 * auVar670._12_4_;
        bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
        auVar671._16_4_ = (uint)bVar12 * auVar680._16_4_ | !bVar12 * auVar670._16_4_;
        bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
        auVar671._20_4_ = (uint)bVar12 * auVar680._20_4_ | !bVar12 * auVar670._20_4_;
        bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
        auVar671._24_4_ = (uint)bVar12 * auVar680._24_4_ | !bVar12 * auVar670._24_4_;
        bVar12 = SUB81(uVar430 >> 7,0);
        auVar671._28_4_ = (uint)bVar12 * auVar680._28_4_ | !bVar12 * auVar670._28_4_;
        in_ZMM22 = ZEXT3264(auVar671);
        auVar680 = vmulps_avx512vl(auVar671,auVar671);
        auVar683 = vmulps_avx512vl(auVar680,auVar680);
        auVar701 = ZEXT1632(auVar460);
        uVar429 = vcmpps_avx512vl(auVar562,auVar701,4);
        uVar429 = uVar47 & uVar429;
        auVar684 = vfmadd213ps_avx512vl(auVar1445,auVar683,auVar1499);
        auVar684 = vfmadd213ps_avx512vl(auVar684,auVar683,auVar1553);
        auVar685 = vfmadd213ps_avx512vl(auVar1661,auVar683,auVar1715);
        auVar685 = vfmadd213ps_avx512vl(auVar685,auVar683,auVar1765);
        auVar685 = vfmadd213ps_avx512vl(auVar685,auVar683,auVar1815);
        auVar684 = vfmadd213ps_avx512vl(auVar684,auVar683,auVar1607);
        auVar683 = vfmadd213ps_avx512vl(auVar685,auVar683,auVar1388);
        auVar680 = vfmadd231ps_avx512vl(auVar683,auVar680,auVar684);
        auVar680 = vmulps_avx512vl(auVar680,auVar671);
        uVar431 = vcmpps_avx512vl(auVar562,auVar701,1);
        auVar683 = vaddps_avx512vl(auVar680,auVar674);
        auVar672._0_4_ =
             (uint)(bVar29 & 1) * auVar683._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar680._0_4_;
        bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
        auVar672._4_4_ = (uint)bVar12 * auVar683._4_4_ | (uint)!bVar12 * auVar680._4_4_;
        bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
        auVar672._8_4_ = (uint)bVar12 * auVar683._8_4_ | (uint)!bVar12 * auVar680._8_4_;
        bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
        auVar672._12_4_ = (uint)bVar12 * auVar683._12_4_ | (uint)!bVar12 * auVar680._12_4_;
        bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
        auVar672._16_4_ = (uint)bVar12 * auVar683._16_4_ | (uint)!bVar12 * auVar680._16_4_;
        bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
        auVar672._20_4_ = (uint)bVar12 * auVar683._20_4_ | (uint)!bVar12 * auVar680._20_4_;
        bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
        auVar672._24_4_ = (uint)bVar12 * auVar683._24_4_ | (uint)!bVar12 * auVar680._24_4_;
        bVar12 = SUB81(uVar430 >> 7,0);
        auVar672._28_4_ = (uint)bVar12 * auVar683._28_4_ | (uint)!bVar12 * auVar680._28_4_;
        auVar679 = vpternlogd_avx512vl(auVar672,auVar679,auVar1272,0xf8);
        auVar562 = vpternlogd_avx512vl(auVar562,auVar677,auVar1272,0xec);
        auVar680 = vaddps_avx512vl(auVar679,auVar668);
        bVar12 = (bool)((byte)uVar431 & 1);
        bVar14 = (bool)((byte)(uVar431 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar431 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar431 >> 3) & 1);
        bVar23 = (bool)((byte)(uVar431 >> 4) & 1);
        bVar26 = (bool)((byte)(uVar431 >> 5) & 1);
        bVar30 = (bool)((byte)(uVar431 >> 6) & 1);
        bVar33 = SUB81(uVar431 >> 7,0);
        uVar46 = vcmpps_avx512vl(auVar701,auVar562,2);
        bVar29 = (byte)uVar47 | (byte)uVar46;
        auVar683 = vpblendmd_avx512vl(auVar678,auVar669);
        bVar15 = (bool)(bVar29 >> 1 & 1);
        bVar18 = (bool)(bVar29 >> 2 & 1);
        bVar21 = (bool)(bVar29 >> 3 & 1);
        bVar24 = (bool)(bVar29 >> 4 & 1);
        bVar27 = (bool)(bVar29 >> 5 & 1);
        bVar31 = (bool)(bVar29 >> 6 & 1);
        bVar13 = (bool)((byte)uVar429 & 1);
        bVar16 = (bool)((byte)(uVar429 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar429 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar429 >> 3) & 1);
        bVar25 = (bool)((byte)(uVar429 >> 4) & 1);
        bVar28 = (bool)((byte)(uVar429 >> 5) & 1);
        bVar32 = (bool)((byte)(uVar429 >> 6) & 1);
        bVar34 = SUB81(uVar429 >> 7,0);
        *(uint *)*(undefined1 (*) [64])outptr =
             (uint)bVar13 * ((uint)bVar12 * auVar680._0_4_ | (uint)!bVar12 * auVar679._0_4_) |
             (uint)!bVar13 *
             ((uint)(bVar29 & 1) * auVar683._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar562._0_4_);
        *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
             (uint)bVar16 * ((uint)bVar14 * auVar680._4_4_ | (uint)!bVar14 * auVar679._4_4_) |
             (uint)!bVar16 * ((uint)bVar15 * auVar683._4_4_ | (uint)!bVar15 * auVar562._4_4_);
        *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
             (uint)bVar19 * ((uint)bVar17 * auVar680._8_4_ | (uint)!bVar17 * auVar679._8_4_) |
             (uint)!bVar19 * ((uint)bVar18 * auVar683._8_4_ | (uint)!bVar18 * auVar562._8_4_);
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
             (uint)bVar22 * ((uint)bVar20 * auVar680._12_4_ | (uint)!bVar20 * auVar679._12_4_) |
             (uint)!bVar22 * ((uint)bVar21 * auVar683._12_4_ | (uint)!bVar21 * auVar562._12_4_);
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0x10) =
             (uint)bVar25 * ((uint)bVar23 * auVar680._16_4_ | (uint)!bVar23 * auVar679._16_4_) |
             (uint)!bVar25 * ((uint)bVar24 * auVar683._16_4_ | (uint)!bVar24 * auVar562._16_4_);
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0x14) =
             (uint)bVar28 * ((uint)bVar26 * auVar680._20_4_ | (uint)!bVar26 * auVar679._20_4_) |
             (uint)!bVar28 * ((uint)bVar27 * auVar683._20_4_ | (uint)!bVar27 * auVar562._20_4_);
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0x18) =
             (uint)bVar32 * ((uint)bVar30 * auVar680._24_4_ | (uint)!bVar30 * auVar679._24_4_) |
             (uint)!bVar32 * ((uint)bVar31 * auVar683._24_4_ | (uint)!bVar31 * auVar562._24_4_);
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0x1c) =
             (uint)bVar34 * ((uint)bVar33 * auVar680._28_4_ | (uint)!bVar33 * auVar679._28_4_) |
             (uint)!bVar34 *
             ((uint)(bVar29 >> 7) * auVar683._28_4_ | (uint)!(bool)(bVar29 >> 7) * auVar562._28_4_);
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar427 = uVar882 + 2;
        iVar424 = uVar882 + 3;
        uVar882 = uVar427;
      } while (iVar424 < (int)uVar425);
    }
    if ((int)uVar425 <= (int)uVar427) {
      return;
    }
    auVar519 = ZEXT816(0) << 0x40;
    auVar70._8_4_ = 0x80000000;
    auVar70._0_8_ = 0x8000000080000000;
    auVar70._12_4_ = 0x80000000;
    auVar460 = vpandd_avx512vl(auVar442,auVar70);
    uVar47 = vcmpps_avx512vl(auVar442,auVar519,1);
    auVar461 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
    bVar12 = (bool)((byte)uVar47 & 1);
    auVar550._0_4_ = (uint)bVar12 * auVar461._0_4_ | (uint)!bVar12 * 0x40490fdb;
    bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
    auVar550._4_4_ = (uint)bVar12 * auVar461._4_4_ | (uint)!bVar12 * 0x40490fdb;
    bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
    auVar550._8_4_ = (uint)bVar12 * auVar461._8_4_ | (uint)!bVar12 * 0x40490fdb;
    bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
    auVar550._12_4_ = (uint)bVar12 * auVar461._12_4_ | (uint)!bVar12 * 0x40490fdb;
    uVar47 = vcmpps_avx512vl(auVar442,auVar519,4);
    auVar71._8_4_ = 0x3fc90fdb;
    auVar71._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar71._12_4_ = 0x3fc90fdb;
    auVar460 = vpord_avx512vl(auVar460,auVar71);
    auVar551._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar460._4_4_;
    auVar551._0_4_ = (uint)((byte)uVar47 & 1) * auVar460._0_4_;
    auVar551._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar460._8_4_;
    auVar551._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar460._12_4_;
    lVar428 = 0;
    auVar1190._8_4_ = 0x80000000;
    auVar1190._0_8_ = 0x8000000080000000;
    auVar1190._12_4_ = 0x80000000;
    auVar1245._8_4_ = 0x7fffffff;
    auVar1245._0_8_ = 0x7fffffff7fffffff;
    auVar1245._12_4_ = 0x7fffffff;
    auVar1307._8_4_ = 0x3f800000;
    auVar1307._0_8_ = 0x3f8000003f800000;
    auVar1307._12_4_ = 0x3f800000;
    auVar1366._8_4_ = 0xbc83a25c;
    auVar1366._0_8_ = 0xbc83a25cbc83a25c;
    auVar1366._12_4_ = 0xbc83a25c;
    auVar1422._8_4_ = 0xbd99b01e;
    auVar1422._0_8_ = 0xbd99b01ebd99b01e;
    auVar1422._12_4_ = 0xbd99b01e;
    auVar1476._8_4_ = 0xbe117200;
    auVar1476._0_8_ = 0xbe117200be117200;
    auVar1476._12_4_ = 0xbe117200;
    auVar1530._8_4_ = 0xbeaaaa53;
    auVar1530._0_8_ = 0xbeaaaa53beaaaa53;
    auVar1530._12_4_ = 0xbeaaaa53;
    auVar1584._8_4_ = 0x3b3ac537;
    auVar1584._0_8_ = 0x3b3ac5373b3ac537;
    auVar1584._12_4_ = 0x3b3ac537;
    auVar1638._8_4_ = 0x3d2edd4e;
    auVar1638._0_8_ = 0x3d2edd4e3d2edd4e;
    auVar1638._12_4_ = 0x3d2edd4e;
    auVar1692._8_4_ = 0x3dd9ed24;
    auVar1692._0_8_ = 0x3dd9ed243dd9ed24;
    auVar1692._12_4_ = 0x3dd9ed24;
    auVar1745._8_4_ = 0x3e4cb974;
    auVar1745._0_8_ = 0x3e4cb9743e4cb974;
    auVar1745._12_4_ = 0x3e4cb974;
    auVar1795._8_4_ = 0x3fc90fdb;
    auVar1795._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar1795._12_4_ = 0x3fc90fdb;
    auVar460 = vpbroadcastd_avx512vl(ZEXT416(0x40490fdb));
    auVar461 = vpord_avx512vl(auVar551,auVar460);
    do {
      auVar472 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[lVar428]));
      auVar464 = vdivss_avx512f(ZEXT416(0x3f800000),auVar472);
      auVar464 = vbroadcastss_avx512vl(auVar464);
      auVar464 = vmulps_avx512vl(auVar442,auVar464);
      auVar465 = vandps_avx512vl(auVar464,auVar1245);
      uVar430 = vcmpps_avx512vl(auVar1307,auVar465,1);
      auVar72._8_4_ = 0xbf800000;
      auVar72._0_8_ = 0xbf800000bf800000;
      auVar72._12_4_ = 0xbf800000;
      auVar466 = vblendmps_avx512vl(auVar465,auVar72);
      bVar29 = (byte)uVar430;
      auVar552._0_4_ =
           (uint)(bVar29 & 1) * auVar466._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM22._0_4_;
      bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
      auVar552._4_4_ = (uint)bVar12 * auVar466._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
      bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
      auVar552._8_4_ = (uint)bVar12 * auVar466._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
      bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
      auVar552._12_4_ = (uint)bVar12 * auVar466._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
      uVar429 = vcmpps_avx512vl(auVar472,auVar519,4);
      uVar429 = uVar47 & uVar429;
      auVar465 = vdivps_avx512vl(auVar552,auVar465);
      auVar553._0_4_ = (uint)(bVar29 & 1) * auVar465._0_4_ | !(bool)(bVar29 & 1) * auVar552._0_4_;
      bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
      auVar553._4_4_ = (uint)bVar12 * auVar465._4_4_ | !bVar12 * auVar552._4_4_;
      bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
      auVar553._8_4_ = (uint)bVar12 * auVar465._8_4_ | !bVar12 * auVar552._8_4_;
      bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
      auVar553._12_4_ = (uint)bVar12 * auVar465._12_4_ | !bVar12 * auVar552._12_4_;
      in_ZMM22 = ZEXT1664(auVar553);
      auVar465 = vmulps_avx512vl(auVar553,auVar553);
      auVar466 = vmulps_avx512vl(auVar465,auVar465);
      uVar431 = vcmpps_avx512vl(auVar472,auVar519,1);
      auVar469 = vfmadd213ps_avx512vl(auVar1366,auVar466,auVar1422);
      auVar469 = vfmadd213ps_avx512vl(auVar469,auVar466,auVar1476);
      auVar470 = vfmadd213ps_avx512vl(auVar1584,auVar466,auVar1638);
      auVar470 = vfmadd213ps_avx512vl(auVar470,auVar466,auVar1692);
      auVar470 = vfmadd213ps_avx512vl(auVar470,auVar466,auVar1745);
      auVar469 = vfmadd213ps_avx512vl(auVar469,auVar466,auVar1530);
      auVar466 = vfmadd213ps_avx512vl(auVar470,auVar466,auVar1307);
      auVar465 = vfmadd231ps_avx512vl(auVar466,auVar465,auVar469);
      auVar465 = vmulps_avx512vl(auVar465,auVar553);
      auVar466 = vaddps_avx512vl(auVar465,auVar1795);
      auVar554._0_4_ =
           (uint)(bVar29 & 1) * auVar466._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar465._0_4_;
      bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
      auVar554._4_4_ = (uint)bVar12 * auVar466._4_4_ | (uint)!bVar12 * auVar465._4_4_;
      bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
      auVar554._8_4_ = (uint)bVar12 * auVar466._8_4_ | (uint)!bVar12 * auVar465._8_4_;
      bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
      auVar554._12_4_ = (uint)bVar12 * auVar466._12_4_ | (uint)!bVar12 * auVar465._12_4_;
      auVar464 = vpternlogd_avx512vl(auVar554,auVar464,auVar1190,0xf8);
      auVar472 = vpternlogd_avx512vl(auVar472,auVar460,auVar1190,0xec);
      uVar46 = vcmpps_avx512vl(auVar519,auVar472,2);
      auVar465 = vaddps_avx512vl(auVar464,auVar550);
      bVar12 = (bool)((byte)uVar431 & 1);
      bVar15 = (bool)((byte)(uVar431 >> 1) & 1);
      bVar18 = (bool)((byte)(uVar431 >> 2) & 1);
      bVar21 = (bool)((byte)(uVar431 >> 3) & 1);
      uVar48 = (ushort)uVar47 | (ushort)uVar46;
      auVar466 = vpblendmd_avx512vl(auVar461,auVar551);
      bVar13 = (bool)((byte)uVar48 & 1);
      bVar16 = (bool)((byte)(uVar48 >> 1) & 1);
      bVar19 = (bool)((byte)(uVar48 >> 2) & 1);
      bVar22 = (bool)((byte)(uVar48 >> 3) & 1);
      bVar14 = (bool)((byte)uVar429 & 1);
      bVar17 = (bool)((byte)(uVar429 >> 1) & 1);
      bVar20 = (bool)((byte)(uVar429 >> 2) & 1);
      bVar23 = (bool)((byte)(uVar429 >> 3) & 1);
      *(uint *)*(undefined1 (*) [64])outptr =
           (uint)bVar14 * ((uint)bVar12 * auVar465._0_4_ | (uint)!bVar12 * auVar464._0_4_) |
           (uint)!bVar14 * ((uint)bVar13 * auVar466._0_4_ | (uint)!bVar13 * auVar472._0_4_);
      *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
           (uint)bVar17 * ((uint)bVar15 * auVar465._4_4_ | (uint)!bVar15 * auVar464._4_4_) |
           (uint)!bVar17 * ((uint)bVar16 * auVar466._4_4_ | (uint)!bVar16 * auVar472._4_4_);
      *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
           (uint)bVar20 * ((uint)bVar18 * auVar465._8_4_ | (uint)!bVar18 * auVar464._8_4_) |
           (uint)!bVar20 * ((uint)bVar19 * auVar466._8_4_ | (uint)!bVar19 * auVar472._8_4_);
      *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
           (uint)bVar23 * ((uint)bVar21 * auVar465._12_4_ | (uint)!bVar21 * auVar464._12_4_) |
           (uint)!bVar23 * ((uint)bVar22 * auVar466._12_4_ | (uint)!bVar22 * auVar472._12_4_);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      lVar428 = lVar428 + 1;
    } while (uVar425 - uVar427 != (int)lVar428);
    return;
  case 0xb:
    uVar425 = bw;
    if (bw < aw) {
      uVar425 = aw;
    }
    iVar424 = bp;
    if (bp < ap) {
      iVar424 = ap;
    }
    uVar427 = iVar424 * uVar425;
    if (ap == bp) {
      if (aw == bw) {
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          iVar424 = 0xf;
          auVar716 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar718 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar725 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar726 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar727 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar728 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          auVar729 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar1774 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar730 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar734 = in_ZMM20;
          do {
            auVar737 = *(undefined1 (*) [64])ptr;
            auVar852 = *(undefined1 (*) [64])ptr1;
            auVar731 = vdivps_avx512f(auVar852,auVar737);
            uVar47 = vcmpps_avx512f(auVar852,auVar1774,1);
            auVar732 = vandps_avx512dq(auVar731,auVar718);
            auVar733._8_4_ = 0xc0490fdb;
            auVar733._0_8_ = 0xc0490fdbc0490fdb;
            auVar733._12_4_ = 0xc0490fdb;
            auVar733._16_4_ = 0xc0490fdb;
            auVar733._20_4_ = 0xc0490fdb;
            auVar733._24_4_ = 0xc0490fdb;
            auVar733._28_4_ = 0xc0490fdb;
            auVar733._32_4_ = 0xc0490fdb;
            auVar733._36_4_ = 0xc0490fdb;
            auVar733._40_4_ = 0xc0490fdb;
            auVar733._44_4_ = 0xc0490fdb;
            auVar733._48_4_ = 0xc0490fdb;
            auVar733._52_4_ = 0xc0490fdb;
            auVar733._56_4_ = 0xc0490fdb;
            auVar733._60_4_ = 0xc0490fdb;
            auVar733 = vblendmps_avx512f(auVar717,auVar733);
            bVar12 = (bool)((byte)uVar47 & 1);
            in_ZMM20._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            in_ZMM20._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            in_ZMM20._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            in_ZMM20._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            in_ZMM20._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            in_ZMM20._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            in_ZMM20._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            in_ZMM20._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            in_ZMM20._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            in_ZMM20._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            in_ZMM20._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            in_ZMM20._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            in_ZMM20._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            in_ZMM20._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            in_ZMM20._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            in_ZMM20._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            uVar47 = vcmpps_avx512f(auVar719,auVar732,1);
            auVar736._8_4_ = 0xbf800000;
            auVar736._0_8_ = 0xbf800000bf800000;
            auVar736._12_4_ = 0xbf800000;
            auVar736._16_4_ = 0xbf800000;
            auVar736._20_4_ = 0xbf800000;
            auVar736._24_4_ = 0xbf800000;
            auVar736._28_4_ = 0xbf800000;
            auVar736._32_4_ = 0xbf800000;
            auVar736._36_4_ = 0xbf800000;
            auVar736._40_4_ = 0xbf800000;
            auVar736._44_4_ = 0xbf800000;
            auVar736._48_4_ = 0xbf800000;
            auVar736._52_4_ = 0xbf800000;
            auVar736._56_4_ = 0xbf800000;
            auVar736._60_4_ = 0xbf800000;
            auVar734 = vblendmps_avx512f(auVar732,auVar736);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar735._0_4_ = (uint)bVar12 * auVar734._0_4_ | (uint)!bVar12 * in_ZMM21._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar735._4_4_ = (uint)bVar12 * auVar734._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar735._8_4_ = (uint)bVar12 * auVar734._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar735._12_4_ = (uint)bVar12 * auVar734._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar735._16_4_ = (uint)bVar12 * auVar734._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar735._20_4_ = (uint)bVar12 * auVar734._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar735._24_4_ = (uint)bVar12 * auVar734._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar735._28_4_ = (uint)bVar12 * auVar734._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
            bVar29 = (byte)(uVar47 >> 8);
            bVar12 = (bool)(bVar29 & 1);
            auVar735._32_4_ = (uint)bVar12 * auVar734._32_4_ | (uint)!bVar12 * in_ZMM21._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar735._36_4_ = (uint)bVar12 * auVar734._36_4_ | (uint)!bVar12 * in_ZMM21._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar735._40_4_ = (uint)bVar12 * auVar734._40_4_ | (uint)!bVar12 * in_ZMM21._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar735._44_4_ = (uint)bVar12 * auVar734._44_4_ | (uint)!bVar12 * in_ZMM21._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar735._48_4_ = (uint)bVar12 * auVar734._48_4_ | (uint)!bVar12 * in_ZMM21._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar735._52_4_ = (uint)bVar12 * auVar734._52_4_ | (uint)!bVar12 * in_ZMM21._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar735._56_4_ = (uint)bVar12 * auVar734._56_4_ | (uint)!bVar12 * in_ZMM21._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar735._60_4_ = (uint)bVar12 * auVar734._60_4_ | (uint)!bVar12 * in_ZMM21._60_4_;
            auVar734 = vmaxps_avx512f(auVar732,auVar719);
            auVar734 = vdivps_avx512f(auVar735,auVar734);
            uVar430 = vcmpps_avx512f(auVar737,auVar1774,4);
            in_ZMM21 = vmulps_avx512f(auVar734,auVar734);
            uVar429 = vcmpps_avx512f(auVar852,auVar1774,4);
            auVar733 = vmulps_avx512f(in_ZMM21,in_ZMM21);
            auVar736 = vfmadd213ps_avx512f(auVar720,auVar733,auVar721);
            auVar736 = vfmadd213ps_avx512f(auVar736,auVar733,auVar722);
            auVar732 = vfmadd213ps_avx512f(auVar724,auVar733,auVar725);
            auVar732 = vfmadd213ps_avx512f(auVar732,auVar733,auVar726);
            auVar736 = vfmadd213ps_avx512f(auVar736,auVar733,auVar723);
            auVar732 = vfmadd213ps_avx512f(auVar732,auVar733,auVar727);
            auVar733 = vfmadd213ps_avx512f(auVar732,auVar733,auVar719);
            auVar733 = vfmadd231ps_avx512f(auVar733,in_ZMM21,auVar736);
            uVar431 = vcmpps_avx512f(auVar737,auVar1774,1);
            auVar734 = vmulps_avx512f(auVar733,auVar734);
            auVar733 = vaddps_avx512f(auVar734,auVar728);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar732._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar732._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar732._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar732._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar732._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar732._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar732._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar732._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)(bVar29 & 1);
            auVar732._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar732._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar732._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar732._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar732._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar732._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar732._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar732._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            auVar734 = vpternlogd_avx512f(auVar732,auVar731,auVar716,0xf8);
            auVar733 = vaddps_avx512f(auVar734,in_ZMM20);
            bVar12 = (bool)((byte)uVar431 & 1);
            bVar15 = (bool)((byte)(uVar431 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar431 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar431 >> 3) & 1);
            bVar21 = (bool)((byte)(uVar431 >> 4) & 1);
            bVar23 = (bool)((byte)(uVar431 >> 5) & 1);
            bVar25 = (bool)((byte)(uVar431 >> 6) & 1);
            bVar27 = (bool)((byte)(uVar431 >> 7) & 1);
            bVar30 = (bool)((byte)(uVar431 >> 8) & 1);
            bVar32 = (bool)((byte)(uVar431 >> 9) & 1);
            bVar34 = (bool)((byte)(uVar431 >> 10) & 1);
            bVar36 = (bool)((byte)(uVar431 >> 0xb) & 1);
            bVar38 = (bool)((byte)(uVar431 >> 0xc) & 1);
            bVar40 = (bool)((byte)(uVar431 >> 0xd) & 1);
            bVar42 = (bool)((byte)(uVar431 >> 0xe) & 1);
            bVar44 = SUB81(uVar431 >> 0xf,0);
            auVar737 = vpternlogd_avx512f(auVar737,auVar716,auVar729,0xea);
            uVar47 = vcmpps_avx512f(auVar737,auVar1774,1);
            auVar737 = vpternlogd_avx512f(auVar852,auVar716,auVar730,0xea);
            bVar13 = (bool)((byte)uVar430 & 1);
            bVar16 = (bool)((byte)(uVar430 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar430 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar430 >> 3) & 1);
            bVar22 = (bool)((byte)(uVar430 >> 4) & 1);
            bVar24 = (bool)((byte)(uVar430 >> 5) & 1);
            bVar26 = (bool)((byte)(uVar430 >> 6) & 1);
            bVar28 = (bool)((byte)(uVar430 >> 7) & 1);
            bVar31 = (bool)((byte)(uVar430 >> 8) & 1);
            bVar33 = (bool)((byte)(uVar430 >> 9) & 1);
            bVar35 = (bool)((byte)(uVar430 >> 10) & 1);
            bVar37 = (bool)((byte)(uVar430 >> 0xb) & 1);
            bVar39 = (bool)((byte)(uVar430 >> 0xc) & 1);
            bVar41 = (bool)((byte)(uVar430 >> 0xd) & 1);
            bVar43 = (bool)((byte)(uVar430 >> 0xe) & 1);
            bVar45 = SUB81(uVar430 >> 0xf,0);
            bVar14 = (bool)((byte)uVar429 & 1);
            auVar852._0_4_ =
                 (uint)bVar14 *
                 ((uint)bVar13 * ((uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar734._0_4_) |
                 (uint)!bVar13 * auVar737._0_4_) |
                 (uint)!bVar14 * (uint)((byte)uVar47 & 1) * auVar717._0_4_;
            bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
            auVar852._4_4_ =
                 (uint)bVar12 *
                 ((uint)bVar16 * ((uint)bVar15 * auVar733._4_4_ | (uint)!bVar15 * auVar734._4_4_) |
                 (uint)!bVar16 * auVar737._4_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 1) & 1) * auVar717._4_4_;
            bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
            auVar852._8_4_ =
                 (uint)bVar12 *
                 ((uint)bVar18 * ((uint)bVar17 * auVar733._8_4_ | (uint)!bVar17 * auVar734._8_4_) |
                 (uint)!bVar18 * auVar737._8_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 2) & 1) * auVar717._8_4_;
            bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
            auVar852._12_4_ =
                 (uint)bVar12 *
                 ((uint)bVar20 * ((uint)bVar19 * auVar733._12_4_ | (uint)!bVar19 * auVar734._12_4_)
                 | (uint)!bVar20 * auVar737._12_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 3) & 1) * auVar717._12_4_;
            bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
            auVar852._16_4_ =
                 (uint)bVar12 *
                 ((uint)bVar22 * ((uint)bVar21 * auVar733._16_4_ | (uint)!bVar21 * auVar734._16_4_)
                 | (uint)!bVar22 * auVar737._16_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 4) & 1) * auVar717._16_4_;
            bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
            auVar852._20_4_ =
                 (uint)bVar12 *
                 ((uint)bVar24 * ((uint)bVar23 * auVar733._20_4_ | (uint)!bVar23 * auVar734._20_4_)
                 | (uint)!bVar24 * auVar737._20_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 5) & 1) * auVar717._20_4_;
            bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
            auVar852._24_4_ =
                 (uint)bVar12 *
                 ((uint)bVar26 * ((uint)bVar25 * auVar733._24_4_ | (uint)!bVar25 * auVar734._24_4_)
                 | (uint)!bVar26 * auVar737._24_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 6) & 1) * auVar717._24_4_;
            bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
            auVar852._28_4_ =
                 (uint)bVar12 *
                 ((uint)bVar28 * ((uint)bVar27 * auVar733._28_4_ | (uint)!bVar27 * auVar734._28_4_)
                 | (uint)!bVar28 * auVar737._28_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 7) & 1) * auVar717._28_4_;
            bVar12 = (bool)((byte)(uVar429 >> 8) & 1);
            auVar852._32_4_ =
                 (uint)bVar12 *
                 ((uint)bVar31 * ((uint)bVar30 * auVar733._32_4_ | (uint)!bVar30 * auVar734._32_4_)
                 | (uint)!bVar31 * auVar737._32_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 8) & 1) * auVar717._32_4_;
            bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
            auVar852._36_4_ =
                 (uint)bVar12 *
                 ((uint)bVar33 * ((uint)bVar32 * auVar733._36_4_ | (uint)!bVar32 * auVar734._36_4_)
                 | (uint)!bVar33 * auVar737._36_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 9) & 1) * auVar717._36_4_;
            bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
            auVar852._40_4_ =
                 (uint)bVar12 *
                 ((uint)bVar35 * ((uint)bVar34 * auVar733._40_4_ | (uint)!bVar34 * auVar734._40_4_)
                 | (uint)!bVar35 * auVar737._40_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 10) & 1) * auVar717._40_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
            auVar852._44_4_ =
                 (uint)bVar12 *
                 ((uint)bVar37 * ((uint)bVar36 * auVar733._44_4_ | (uint)!bVar36 * auVar734._44_4_)
                 | (uint)!bVar37 * auVar737._44_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xb) & 1) * auVar717._44_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
            auVar852._48_4_ =
                 (uint)bVar12 *
                 ((uint)bVar39 * ((uint)bVar38 * auVar733._48_4_ | (uint)!bVar38 * auVar734._48_4_)
                 | (uint)!bVar39 * auVar737._48_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xc) & 1) * auVar717._48_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
            auVar852._52_4_ =
                 (uint)bVar12 *
                 ((uint)bVar41 * ((uint)bVar40 * auVar733._52_4_ | (uint)!bVar40 * auVar734._52_4_)
                 | (uint)!bVar41 * auVar737._52_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xd) & 1) * auVar717._52_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
            auVar852._56_4_ =
                 (uint)bVar12 *
                 ((uint)bVar43 * ((uint)bVar42 * auVar733._56_4_ | (uint)!bVar42 * auVar734._56_4_)
                 | (uint)!bVar43 * auVar737._56_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xe) & 1) * auVar717._56_4_;
            bVar12 = SUB81(uVar429 >> 0xf,0);
            auVar852._60_4_ =
                 (uint)bVar12 *
                 ((uint)bVar45 * ((uint)bVar44 * auVar733._60_4_ | (uint)!bVar44 * auVar734._60_4_)
                 | (uint)!bVar45 * auVar737._60_4_) |
                 (uint)!bVar12 * (uint)(byte)(uVar47 >> 0xf) * auVar717._60_4_;
            ptr = (float *)((long)ptr + 0x40);
            *(undefined1 (*) [64])outptr = auVar852;
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
            auVar734 = in_ZMM20;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        if ((int)(uVar425 | 7) < (int)uVar427) {
          auVar674._8_4_ = 0x80000000;
          auVar674._0_8_ = 0x8000000080000000;
          auVar674._12_4_ = 0x80000000;
          auVar674._16_4_ = 0x80000000;
          auVar674._20_4_ = 0x80000000;
          auVar674._24_4_ = 0x80000000;
          auVar674._28_4_ = 0x80000000;
          auVar677._8_4_ = 0x40490fdb;
          auVar677._0_8_ = 0x40490fdb40490fdb;
          auVar677._12_4_ = 0x40490fdb;
          auVar677._16_4_ = 0x40490fdb;
          auVar677._20_4_ = 0x40490fdb;
          auVar677._24_4_ = 0x40490fdb;
          auVar677._28_4_ = 0x40490fdb;
          auVar678._8_4_ = 0x7fffffff;
          auVar678._0_8_ = 0x7fffffff7fffffff;
          auVar678._12_4_ = 0x7fffffff;
          auVar678._16_4_ = 0x7fffffff;
          auVar678._20_4_ = 0x7fffffff;
          auVar678._24_4_ = 0x7fffffff;
          auVar678._28_4_ = 0x7fffffff;
          auVar679._8_4_ = 0x3f800000;
          auVar679._0_8_ = 0x3f8000003f800000;
          auVar679._12_4_ = 0x3f800000;
          auVar679._16_4_ = 0x3f800000;
          auVar679._20_4_ = 0x3f800000;
          auVar679._24_4_ = 0x3f800000;
          auVar679._28_4_ = 0x3f800000;
          auVar680._8_4_ = 0xbc83a25c;
          auVar680._0_8_ = 0xbc83a25cbc83a25c;
          auVar680._12_4_ = 0xbc83a25c;
          auVar680._16_4_ = 0xbc83a25c;
          auVar680._20_4_ = 0xbc83a25c;
          auVar680._24_4_ = 0xbc83a25c;
          auVar680._28_4_ = 0xbc83a25c;
          auVar683._8_4_ = 0xbd99b01e;
          auVar683._0_8_ = 0xbd99b01ebd99b01e;
          auVar683._12_4_ = 0xbd99b01e;
          auVar683._16_4_ = 0xbd99b01e;
          auVar683._20_4_ = 0xbd99b01e;
          auVar683._24_4_ = 0xbd99b01e;
          auVar683._28_4_ = 0xbd99b01e;
          auVar684._8_4_ = 0xbe117200;
          auVar684._0_8_ = 0xbe117200be117200;
          auVar684._12_4_ = 0xbe117200;
          auVar684._16_4_ = 0xbe117200;
          auVar684._20_4_ = 0xbe117200;
          auVar684._24_4_ = 0xbe117200;
          auVar684._28_4_ = 0xbe117200;
          auVar685._8_4_ = 0xbeaaaa53;
          auVar685._0_8_ = 0xbeaaaa53beaaaa53;
          auVar685._12_4_ = 0xbeaaaa53;
          auVar685._16_4_ = 0xbeaaaa53;
          auVar685._20_4_ = 0xbeaaaa53;
          auVar685._24_4_ = 0xbeaaaa53;
          auVar685._28_4_ = 0xbeaaaa53;
          auVar701._8_4_ = 0x3b3ac537;
          auVar701._0_8_ = 0x3b3ac5373b3ac537;
          auVar701._12_4_ = 0x3b3ac537;
          auVar701._16_4_ = 0x3b3ac537;
          auVar701._20_4_ = 0x3b3ac537;
          auVar701._24_4_ = 0x3b3ac537;
          auVar701._28_4_ = 0x3b3ac537;
          auVar565._8_4_ = 0x3d2edd4e;
          auVar565._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar565._12_4_ = 0x3d2edd4e;
          auVar565._16_4_ = 0x3d2edd4e;
          auVar565._20_4_ = 0x3d2edd4e;
          auVar565._24_4_ = 0x3d2edd4e;
          auVar565._28_4_ = 0x3d2edd4e;
          auVar566._8_4_ = 0x3dd9ed24;
          auVar566._0_8_ = 0x3dd9ed243dd9ed24;
          auVar566._12_4_ = 0x3dd9ed24;
          auVar566._16_4_ = 0x3dd9ed24;
          auVar566._20_4_ = 0x3dd9ed24;
          auVar566._24_4_ = 0x3dd9ed24;
          auVar566._28_4_ = 0x3dd9ed24;
          auVar567._8_4_ = 0x3e4cb974;
          auVar567._0_8_ = 0x3e4cb9743e4cb974;
          auVar567._12_4_ = 0x3e4cb974;
          auVar567._16_4_ = 0x3e4cb974;
          auVar567._20_4_ = 0x3e4cb974;
          auVar567._24_4_ = 0x3e4cb974;
          auVar567._28_4_ = 0x3e4cb974;
          auVar568._8_4_ = 0x3fc90fdb;
          auVar568._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar568._12_4_ = 0x3fc90fdb;
          auVar568._16_4_ = 0x3fc90fdb;
          auVar568._20_4_ = 0x3fc90fdb;
          auVar568._24_4_ = 0x3fc90fdb;
          auVar568._28_4_ = 0x3fc90fdb;
          auVar569._8_4_ = 0x40490fdb;
          auVar569._0_8_ = 0x40490fdb40490fdb;
          auVar569._12_4_ = 0x40490fdb;
          auVar569._16_4_ = 0x40490fdb;
          auVar569._20_4_ = 0x40490fdb;
          auVar569._24_4_ = 0x40490fdb;
          auVar569._28_4_ = 0x40490fdb;
          auVar570._8_4_ = 0x3fc90fdb;
          auVar570._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar570._12_4_ = 0x3fc90fdb;
          auVar570._16_4_ = 0x3fc90fdb;
          auVar570._20_4_ = 0x3fc90fdb;
          auVar570._24_4_ = 0x3fc90fdb;
          auVar570._28_4_ = 0x3fc90fdb;
          uVar882 = uVar425;
          do {
            auVar562 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
            auVar563 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr1;
            auVar555 = vdivps_avx512vl(auVar563,auVar562);
            auVar564 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            uVar47 = vcmpps_avx512vl(auVar563,auVar564,1);
            vandps_avx512vl(auVar555,auVar678);
            auVar556._8_4_ = 0xc0490fdb;
            auVar556._0_8_ = 0xc0490fdbc0490fdb;
            auVar556._12_4_ = 0xc0490fdb;
            auVar556._16_4_ = 0xc0490fdb;
            auVar556._20_4_ = 0xc0490fdb;
            auVar556._24_4_ = 0xc0490fdb;
            auVar556._28_4_ = 0xc0490fdb;
            auVar556 = vblendmps_avx512vl(auVar677,auVar556);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar557._0_4_ = (uint)bVar12 * auVar556._0_4_ | (uint)!bVar12 * in_ZMM20._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar557._4_4_ = (uint)bVar12 * auVar556._4_4_ | (uint)!bVar12 * in_ZMM20._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar557._8_4_ = (uint)bVar12 * auVar556._8_4_ | (uint)!bVar12 * in_ZMM20._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar557._12_4_ = (uint)bVar12 * auVar556._12_4_ | (uint)!bVar12 * in_ZMM20._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar557._16_4_ = (uint)bVar12 * auVar556._16_4_ | (uint)!bVar12 * in_ZMM20._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar557._20_4_ = (uint)bVar12 * auVar556._20_4_ | (uint)!bVar12 * in_ZMM20._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar557._24_4_ = (uint)bVar12 * auVar556._24_4_ | (uint)!bVar12 * in_ZMM20._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar557._28_4_ = (uint)bVar12 * auVar556._28_4_ | (uint)!bVar12 * in_ZMM20._28_4_;
            in_ZMM20 = ZEXT3264(auVar557);
            uVar47 = vcmpps_avx512vl(auVar679,auVar555,1);
            auVar559._8_4_ = 0xbf800000;
            auVar559._0_8_ = 0xbf800000bf800000;
            auVar559._12_4_ = 0xbf800000;
            auVar559._16_4_ = 0xbf800000;
            auVar559._20_4_ = 0xbf800000;
            auVar559._24_4_ = 0xbf800000;
            auVar559._28_4_ = 0xbf800000;
            auVar556 = vblendmps_avx512vl(auVar555,auVar559);
            bVar29 = (byte)uVar47;
            auVar560._0_4_ =
                 (uint)(bVar29 & 1) * auVar556._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM21._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar560._4_4_ = (uint)bVar12 * auVar556._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar560._8_4_ = (uint)bVar12 * auVar556._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar560._12_4_ = (uint)bVar12 * auVar556._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar560._16_4_ = (uint)bVar12 * auVar556._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar560._20_4_ = (uint)bVar12 * auVar556._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar560._24_4_ = (uint)bVar12 * auVar556._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar560._28_4_ = (uint)bVar12 * auVar556._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
            auVar556 = vdivps_avx512vl(auVar560,auVar555);
            auVar558._0_4_ =
                 (uint)(bVar29 & 1) * auVar556._0_4_ | !(bool)(bVar29 & 1) * auVar560._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar558._4_4_ = (uint)bVar12 * auVar556._4_4_ | !bVar12 * auVar560._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar558._8_4_ = (uint)bVar12 * auVar556._8_4_ | !bVar12 * auVar560._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar558._12_4_ = (uint)bVar12 * auVar556._12_4_ | !bVar12 * auVar560._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar558._16_4_ = (uint)bVar12 * auVar556._16_4_ | !bVar12 * auVar560._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar558._20_4_ = (uint)bVar12 * auVar556._20_4_ | !bVar12 * auVar560._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar558._24_4_ = (uint)bVar12 * auVar556._24_4_ | !bVar12 * auVar560._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar558._28_4_ = (uint)bVar12 * auVar556._28_4_ | !bVar12 * auVar560._28_4_;
            in_ZMM21 = ZEXT3264(auVar558);
            uVar430 = vcmpps_avx512vl(auVar563,auVar564,4);
            auVar556 = vmulps_avx512vl(auVar558,auVar558);
            uVar429 = vcmpps_avx512vl(auVar562,auVar564,1);
            auVar559 = vmulps_avx512vl(auVar556,auVar556);
            auVar560 = vfmadd213ps_avx512vl(auVar680,auVar559,auVar683);
            auVar560 = vfmadd213ps_avx512vl(auVar560,auVar559,auVar684);
            auVar561 = vfmadd213ps_avx512vl(auVar701,auVar559,auVar565);
            auVar561 = vfmadd213ps_avx512vl(auVar561,auVar559,auVar566);
            auVar560 = vfmadd213ps_avx512vl(auVar560,auVar559,auVar685);
            auVar561 = vfmadd213ps_avx512vl(auVar561,auVar559,auVar567);
            auVar559 = vfmadd213ps_avx512vl(auVar561,auVar559,auVar679);
            auVar556 = vfmadd231ps_avx512vl(auVar559,auVar556,auVar560);
            uVar431 = vcmpps_avx512vl(auVar562,auVar564,4);
            uVar431 = uVar430 & uVar431;
            auVar556 = vmulps_avx512vl(auVar556,auVar558);
            auVar559 = vaddps_avx512vl(auVar556,auVar568);
            auVar561._0_4_ =
                 (uint)(bVar29 & 1) * auVar559._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar556._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar561._4_4_ = (uint)bVar12 * auVar559._4_4_ | (uint)!bVar12 * auVar556._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar561._8_4_ = (uint)bVar12 * auVar559._8_4_ | (uint)!bVar12 * auVar556._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar561._12_4_ = (uint)bVar12 * auVar559._12_4_ | (uint)!bVar12 * auVar556._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar561._16_4_ = (uint)bVar12 * auVar559._16_4_ | (uint)!bVar12 * auVar556._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar561._20_4_ = (uint)bVar12 * auVar559._20_4_ | (uint)!bVar12 * auVar556._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar561._24_4_ = (uint)bVar12 * auVar559._24_4_ | (uint)!bVar12 * auVar556._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            auVar561._28_4_ = (uint)bVar12 * auVar559._28_4_ | (uint)!bVar12 * auVar556._28_4_;
            auVar562 = vpternlogd_avx512vl(auVar562,auVar569,auVar674,0xec);
            auVar556 = vpternlogd_avx512vl(auVar561,auVar555,auVar674,0xf8);
            uVar46 = vcmpps_avx512vl(auVar564,auVar562,2);
            bVar29 = ~((byte)uVar430 | (byte)uVar46);
            auVar562 = vaddps_avx512vl(auVar556,auVar557);
            bVar12 = (bool)((byte)uVar429 & 1);
            bVar15 = (bool)((byte)(uVar429 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar429 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar429 >> 3) & 1);
            bVar21 = (bool)((byte)(uVar429 >> 4) & 1);
            bVar23 = (bool)((byte)(uVar429 >> 5) & 1);
            bVar25 = (bool)((byte)(uVar429 >> 6) & 1);
            bVar27 = SUB81(uVar429 >> 7,0);
            auVar559 = vmovdqa32_avx512vl(auVar569);
            iVar426 = (uint)(bVar29 & 1) * auVar559._0_4_;
            iVar424 = (uint)(bVar29 >> 1 & 1) * auVar559._4_4_;
            auVar555._4_4_ = iVar424;
            auVar555._0_4_ = iVar426;
            iVar1 = (uint)(bVar29 >> 2 & 1) * auVar559._8_4_;
            auVar555._8_4_ = iVar1;
            iVar2 = (uint)(bVar29 >> 3 & 1) * auVar559._12_4_;
            auVar555._12_4_ = iVar2;
            iVar3 = (uint)(bVar29 >> 4 & 1) * auVar559._16_4_;
            auVar555._16_4_ = iVar3;
            iVar4 = (uint)(bVar29 >> 5 & 1) * auVar559._20_4_;
            auVar555._20_4_ = iVar4;
            iVar5 = (uint)(bVar29 >> 6 & 1) * auVar559._24_4_;
            auVar555._24_4_ = iVar5;
            iVar6 = (uint)(bVar29 >> 7) * auVar559._28_4_;
            auVar555._28_4_ = iVar6;
            auVar563 = vpternlogd_avx512vl(auVar563,auVar555,auVar674,0xec);
            auVar563 = vpord_avx512vl(auVar563,auVar570);
            bVar13 = (bool)((byte)uVar430 & 1);
            bVar16 = (bool)((byte)(uVar430 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar430 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar430 >> 3) & 1);
            bVar22 = (bool)((byte)(uVar430 >> 4) & 1);
            bVar24 = (bool)((byte)(uVar430 >> 5) & 1);
            bVar26 = (bool)((byte)(uVar430 >> 6) & 1);
            bVar28 = SUB81(uVar430 >> 7,0);
            bVar14 = (bool)((byte)uVar431 & 1);
            auVar564._0_4_ =
                 (uint)bVar14 * ((uint)bVar12 * auVar562._0_4_ | (uint)!bVar12 * auVar556._0_4_) |
                 (uint)!bVar14 * ((uint)bVar13 * auVar563._0_4_ | (uint)!bVar13 * iVar426);
            bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
            auVar564._4_4_ =
                 (uint)bVar12 * ((uint)bVar15 * auVar562._4_4_ | (uint)!bVar15 * auVar556._4_4_) |
                 (uint)!bVar12 * ((uint)bVar16 * auVar563._4_4_ | (uint)!bVar16 * iVar424);
            bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
            auVar564._8_4_ =
                 (uint)bVar12 * ((uint)bVar17 * auVar562._8_4_ | (uint)!bVar17 * auVar556._8_4_) |
                 (uint)!bVar12 * ((uint)bVar18 * auVar563._8_4_ | (uint)!bVar18 * iVar1);
            bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
            auVar564._12_4_ =
                 (uint)bVar12 * ((uint)bVar19 * auVar562._12_4_ | (uint)!bVar19 * auVar556._12_4_) |
                 (uint)!bVar12 * ((uint)bVar20 * auVar563._12_4_ | (uint)!bVar20 * iVar2);
            bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
            auVar564._16_4_ =
                 (uint)bVar12 * ((uint)bVar21 * auVar562._16_4_ | (uint)!bVar21 * auVar556._16_4_) |
                 (uint)!bVar12 * ((uint)bVar22 * auVar563._16_4_ | (uint)!bVar22 * iVar3);
            bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
            auVar564._20_4_ =
                 (uint)bVar12 * ((uint)bVar23 * auVar562._20_4_ | (uint)!bVar23 * auVar556._20_4_) |
                 (uint)!bVar12 * ((uint)bVar24 * auVar563._20_4_ | (uint)!bVar24 * iVar4);
            bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
            auVar564._24_4_ =
                 (uint)bVar12 * ((uint)bVar25 * auVar562._24_4_ | (uint)!bVar25 * auVar556._24_4_) |
                 (uint)!bVar12 * ((uint)bVar26 * auVar563._24_4_ | (uint)!bVar26 * iVar5);
            bVar12 = SUB81(uVar431 >> 7,0);
            auVar564._28_4_ =
                 (uint)bVar12 * ((uint)bVar27 * auVar562._28_4_ | (uint)!bVar27 * auVar556._28_4_) |
                 (uint)!bVar12 * ((uint)bVar28 * auVar563._28_4_ | (uint)!bVar28 * iVar6);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar564;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)(uVar425 | 3) < (int)uVar427) {
          auVar442 = ZEXT816(0) << 0x40;
          auVar460._8_4_ = 0x80000000;
          auVar460._0_8_ = 0x8000000080000000;
          auVar460._12_4_ = 0x80000000;
          auVar461._8_4_ = 0x40490fdb;
          auVar461._0_8_ = 0x40490fdb40490fdb;
          auVar461._12_4_ = 0x40490fdb;
          auVar519._8_4_ = 0x7fffffff;
          auVar519._0_8_ = 0x7fffffff7fffffff;
          auVar519._12_4_ = 0x7fffffff;
          auVar472._8_4_ = 0x3f800000;
          auVar472._0_8_ = 0x3f8000003f800000;
          auVar472._12_4_ = 0x3f800000;
          auVar464._8_4_ = 0xbc83a25c;
          auVar464._0_8_ = 0xbc83a25cbc83a25c;
          auVar464._12_4_ = 0xbc83a25c;
          auVar465._8_4_ = 0xbd99b01e;
          auVar465._0_8_ = 0xbd99b01ebd99b01e;
          auVar465._12_4_ = 0xbd99b01e;
          auVar466._8_4_ = 0xbe117200;
          auVar466._0_8_ = 0xbe117200be117200;
          auVar466._12_4_ = 0xbe117200;
          auVar469._8_4_ = 0xbeaaaa53;
          auVar469._0_8_ = 0xbeaaaa53beaaaa53;
          auVar469._12_4_ = 0xbeaaaa53;
          auVar470._8_4_ = 0x3b3ac537;
          auVar470._0_8_ = 0x3b3ac5373b3ac537;
          auVar470._12_4_ = 0x3b3ac537;
          auVar523._8_4_ = 0x3d2edd4e;
          auVar523._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar523._12_4_ = 0x3d2edd4e;
          auVar443._8_4_ = 0x3dd9ed24;
          auVar443._0_8_ = 0x3dd9ed243dd9ed24;
          auVar443._12_4_ = 0x3dd9ed24;
          auVar444._8_4_ = 0x3e4cb974;
          auVar444._0_8_ = 0x3e4cb9743e4cb974;
          auVar444._12_4_ = 0x3e4cb974;
          auVar445._8_4_ = 0x3fc90fdb;
          auVar445._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar445._12_4_ = 0x3fc90fdb;
          auVar446._8_4_ = 0x40490fdb;
          auVar446._0_8_ = 0x40490fdb40490fdb;
          auVar446._12_4_ = 0x40490fdb;
          auVar447._8_4_ = 0x3fc90fdb;
          auVar447._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar447._12_4_ = 0x3fc90fdb;
          uVar882 = uVar425;
          do {
            auVar439 = *(undefined1 (*) [16])*(undefined1 (*) [64])ptr;
            auVar440 = *(undefined1 (*) [16])*(undefined1 (*) [64])ptr1;
            auVar432 = vdivps_avx512vl(auVar440,auVar439);
            uVar47 = vcmpps_avx512vl(auVar440,auVar442,1);
            auVar433 = vandps_avx512vl(auVar432,auVar519);
            auVar434._8_4_ = 0xc0490fdb;
            auVar434._0_8_ = 0xc0490fdbc0490fdb;
            auVar434._12_4_ = 0xc0490fdb;
            auVar434 = vblendmps_avx512vl(auVar461,auVar434);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar435._0_4_ = (uint)bVar12 * auVar434._0_4_ | (uint)!bVar12 * in_ZMM20._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar435._4_4_ = (uint)bVar12 * auVar434._4_4_ | (uint)!bVar12 * in_ZMM20._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar435._8_4_ = (uint)bVar12 * auVar434._8_4_ | (uint)!bVar12 * in_ZMM20._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar435._12_4_ = (uint)bVar12 * auVar434._12_4_ | (uint)!bVar12 * in_ZMM20._12_4_;
            in_ZMM20 = ZEXT1664(auVar435);
            uVar47 = vcmpps_avx512vl(auVar472,auVar433,1);
            auVar436._8_4_ = 0xbf800000;
            auVar436._0_8_ = 0xbf800000bf800000;
            auVar436._12_4_ = 0xbf800000;
            auVar434 = vblendmps_avx512vl(auVar433,auVar436);
            bVar29 = (byte)uVar47;
            auVar437._0_4_ =
                 (uint)(bVar29 & 1) * auVar434._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM21._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar437._4_4_ = (uint)bVar12 * auVar434._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar437._8_4_ = (uint)bVar12 * auVar434._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar437._12_4_ = (uint)bVar12 * auVar434._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
            uVar430 = vcmpps_avx512vl(auVar440,auVar442,4);
            auVar434 = vdivps_avx512vl(auVar437,auVar433);
            auVar433._0_4_ =
                 (uint)(bVar29 & 1) * auVar434._0_4_ | !(bool)(bVar29 & 1) * auVar437._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar433._4_4_ = (uint)bVar12 * auVar434._4_4_ | !bVar12 * auVar437._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar433._8_4_ = (uint)bVar12 * auVar434._8_4_ | !bVar12 * auVar437._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar433._12_4_ = (uint)bVar12 * auVar434._12_4_ | !bVar12 * auVar437._12_4_;
            in_ZMM21 = ZEXT1664(auVar433);
            auVar434 = vmulps_avx512vl(auVar433,auVar433);
            uVar429 = vcmpps_avx512vl(auVar439,auVar442,1);
            auVar436 = vmulps_avx512vl(auVar434,auVar434);
            auVar437 = vfmadd213ps_avx512vl(auVar464,auVar436,auVar465);
            auVar437 = vfmadd213ps_avx512vl(auVar437,auVar436,auVar466);
            auVar438 = vfmadd213ps_avx512vl(auVar470,auVar436,auVar523);
            auVar438 = vfmadd213ps_avx512vl(auVar438,auVar436,auVar443);
            auVar437 = vfmadd213ps_avx512vl(auVar437,auVar436,auVar469);
            auVar438 = vfmadd213ps_avx512vl(auVar438,auVar436,auVar444);
            auVar436 = vfmadd213ps_avx512vl(auVar438,auVar436,auVar472);
            auVar434 = vfmadd231ps_avx512vl(auVar436,auVar434,auVar437);
            uVar431 = vcmpps_avx512vl(auVar439,auVar442,4);
            uVar431 = uVar430 & uVar431;
            auVar434 = vmulps_avx512vl(auVar434,auVar433);
            auVar436 = vaddps_avx512vl(auVar434,auVar445);
            auVar438._0_4_ =
                 (uint)(bVar29 & 1) * auVar436._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar434._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar438._4_4_ = (uint)bVar12 * auVar436._4_4_ | (uint)!bVar12 * auVar434._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar438._8_4_ = (uint)bVar12 * auVar436._8_4_ | (uint)!bVar12 * auVar434._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar438._12_4_ = (uint)bVar12 * auVar436._12_4_ | (uint)!bVar12 * auVar434._12_4_;
            auVar439 = vpternlogd_avx512vl(auVar439,auVar446,auVar460,0xec);
            auVar434 = vpternlogd_avx512vl(auVar438,auVar432,auVar460,0xf8);
            uVar46 = vcmpps_avx512vl(auVar442,auVar439,2);
            uVar48 = ~((ushort)uVar430 | (ushort)uVar46);
            auVar439 = vaddps_avx512vl(auVar434,auVar435);
            bVar12 = (bool)((byte)uVar429 & 1);
            bVar15 = (bool)((byte)(uVar429 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar429 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar429 >> 3) & 1);
            auVar436 = vmovdqa32_avx512vl(auVar446);
            iVar424 = (uint)((byte)uVar48 & 1) * auVar436._0_4_;
            iVar426 = (uint)((byte)(uVar48 >> 1) & 1) * auVar436._4_4_;
            auVar432._4_4_ = iVar426;
            auVar432._0_4_ = iVar424;
            iVar1 = (uint)((byte)(uVar48 >> 2) & 1) * auVar436._8_4_;
            auVar432._8_4_ = iVar1;
            iVar2 = (uint)((byte)(uVar48 >> 3) & 1) * auVar436._12_4_;
            auVar432._12_4_ = iVar2;
            auVar440 = vpternlogd_avx512vl(auVar440,auVar432,auVar460,0xec);
            auVar440 = vpord_avx512vl(auVar440,auVar447);
            bVar13 = (bool)((byte)uVar430 & 1);
            bVar16 = (bool)((byte)(uVar430 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar430 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar430 >> 3) & 1);
            bVar14 = (bool)((byte)uVar431 & 1);
            auVar441._0_4_ =
                 (uint)bVar14 * ((uint)bVar12 * auVar439._0_4_ | (uint)!bVar12 * auVar434._0_4_) |
                 (uint)!bVar14 * ((uint)bVar13 * auVar440._0_4_ | (uint)!bVar13 * iVar424);
            bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
            auVar441._4_4_ =
                 (uint)bVar12 * ((uint)bVar15 * auVar439._4_4_ | (uint)!bVar15 * auVar434._4_4_) |
                 (uint)!bVar12 * ((uint)bVar16 * auVar440._4_4_ | (uint)!bVar16 * iVar426);
            bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
            auVar441._8_4_ =
                 (uint)bVar12 * ((uint)bVar17 * auVar439._8_4_ | (uint)!bVar17 * auVar434._8_4_) |
                 (uint)!bVar12 * ((uint)bVar18 * auVar440._8_4_ | (uint)!bVar18 * iVar1);
            bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
            auVar441._12_4_ =
                 (uint)bVar12 * ((uint)bVar19 * auVar439._12_4_ | (uint)!bVar19 * auVar434._12_4_) |
                 (uint)!bVar12 * ((uint)bVar20 * auVar440._12_4_ | (uint)!bVar20 * iVar2);
            *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar441;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
            uVar425 = uVar882 + 4;
            iVar424 = uVar882 + 7;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          return;
        }
        lVar428 = 0;
        do {
          fVar890 = atan2f(*(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4),
                           *(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4));
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = fVar890;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (bw == 1) {
        fVar890 = *ptr1;
        if (iVar424 == 4) {
          auVar442 = *(undefined1 (*) [16])ptr1;
        }
        else {
          auVar442._4_4_ = fVar890;
          auVar442._0_4_ = fVar890;
          auVar442._8_4_ = fVar890;
          auVar442._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar563 = *(undefined1 (*) [32])ptr1;
        }
        else {
          auVar563._16_16_ = auVar442;
          auVar563._0_16_ = auVar442;
        }
        if (iVar424 == 0x10) {
          auVar734 = *(undefined1 (*) [64])ptr1;
        }
        else {
          auVar734 = vinsertf64x4_avx512f(ZEXT3264(auVar563),auVar563,1);
        }
        auVar673 = auVar734._0_32_;
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          auVar1774 = ZEXT864(0);
          uVar47 = vcmpps_avx512f(auVar734,auVar1774,1);
          auVar716 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0xc0490fdb));
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar718._0_4_ = (uint)bVar12 * auVar717._0_4_ | (uint)!bVar12 * auVar716._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar718._4_4_ = (uint)bVar12 * auVar717._4_4_ | (uint)!bVar12 * auVar716._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar718._8_4_ = (uint)bVar12 * auVar717._8_4_ | (uint)!bVar12 * auVar716._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar718._12_4_ = (uint)bVar12 * auVar717._12_4_ | (uint)!bVar12 * auVar716._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar718._16_4_ = (uint)bVar12 * auVar717._16_4_ | (uint)!bVar12 * auVar716._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar718._20_4_ = (uint)bVar12 * auVar717._20_4_ | (uint)!bVar12 * auVar716._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar718._24_4_ = (uint)bVar12 * auVar717._24_4_ | (uint)!bVar12 * auVar716._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar718._28_4_ = (uint)bVar12 * auVar717._28_4_ | (uint)!bVar12 * auVar716._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar718._32_4_ = (uint)bVar12 * auVar717._32_4_ | (uint)!bVar12 * auVar716._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar718._36_4_ = (uint)bVar12 * auVar717._36_4_ | (uint)!bVar12 * auVar716._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar718._40_4_ = (uint)bVar12 * auVar717._40_4_ | (uint)!bVar12 * auVar716._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar718._44_4_ = (uint)bVar12 * auVar717._44_4_ | (uint)!bVar12 * auVar716._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar718._48_4_ = (uint)bVar12 * auVar717._48_4_ | (uint)!bVar12 * auVar716._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar718._52_4_ = (uint)bVar12 * auVar717._52_4_ | (uint)!bVar12 * auVar716._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar718._56_4_ = (uint)bVar12 * auVar717._56_4_ | (uint)!bVar12 * auVar716._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar718._60_4_ = (uint)bVar12 * auVar717._60_4_ | (uint)!bVar12 * auVar716._60_4_;
          auVar717 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar716._8_4_ = 0x80000000;
          auVar716._0_8_ = 0x8000000080000000;
          auVar716._12_4_ = 0x80000000;
          auVar716._16_4_ = 0x80000000;
          auVar716._20_4_ = 0x80000000;
          auVar716._24_4_ = 0x80000000;
          auVar716._28_4_ = 0x80000000;
          auVar716._32_4_ = 0x80000000;
          auVar716._36_4_ = 0x80000000;
          auVar716._40_4_ = 0x80000000;
          auVar716._44_4_ = 0x80000000;
          auVar716._48_4_ = 0x80000000;
          auVar716._52_4_ = 0x80000000;
          auVar716._56_4_ = 0x80000000;
          auVar716._60_4_ = 0x80000000;
          auVar716 = vpternlogd_avx512f(auVar717,auVar734,auVar716,0xf8);
          iVar424 = 0xf;
          auVar717 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar725 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar726 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar727 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar728 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar729 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          uVar47 = vcmpps_avx512f(auVar734,auVar1774,4);
          auVar730 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          do {
            auVar737 = *(undefined1 (*) [64])ptr;
            auVar852 = vdivps_avx512f(auVar734,auVar737);
            auVar733 = vandps_avx512dq(auVar852,auVar719);
            uVar430 = vcmpps_avx512f(auVar720,auVar733,1);
            auVar731._8_4_ = 0xbf800000;
            auVar731._0_8_ = 0xbf800000bf800000;
            auVar731._12_4_ = 0xbf800000;
            auVar731._16_4_ = 0xbf800000;
            auVar731._20_4_ = 0xbf800000;
            auVar731._24_4_ = 0xbf800000;
            auVar731._28_4_ = 0xbf800000;
            auVar731._32_4_ = 0xbf800000;
            auVar731._36_4_ = 0xbf800000;
            auVar731._40_4_ = 0xbf800000;
            auVar731._44_4_ = 0xbf800000;
            auVar731._48_4_ = 0xbf800000;
            auVar731._52_4_ = 0xbf800000;
            auVar731._56_4_ = 0xbf800000;
            auVar731._60_4_ = 0xbf800000;
            auVar736 = vblendmps_avx512f(auVar733,auVar731);
            bVar12 = (bool)((byte)uVar430 & 1);
            auVar853._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * in_ZMM22._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar853._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar853._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar853._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar853._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * in_ZMM22._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar853._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * in_ZMM22._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar853._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * in_ZMM22._24_4_;
            bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
            auVar853._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * in_ZMM22._28_4_;
            bVar29 = (byte)(uVar430 >> 8);
            bVar12 = (bool)(bVar29 & 1);
            auVar853._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * in_ZMM22._32_4_;
            bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
            auVar853._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * in_ZMM22._36_4_;
            bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
            auVar853._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * in_ZMM22._40_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
            auVar853._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * in_ZMM22._44_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
            auVar853._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * in_ZMM22._48_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
            auVar853._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * in_ZMM22._52_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
            auVar853._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * in_ZMM22._56_4_;
            bVar12 = SUB81(uVar430 >> 0xf,0);
            auVar853._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * in_ZMM22._60_4_;
            auVar733 = vmaxps_avx512f(auVar733,auVar720);
            auVar733 = vdivps_avx512f(auVar853,auVar733);
            in_ZMM22 = vmulps_avx512f(auVar733,auVar733);
            uVar429 = vcmpps_avx512f(auVar737,auVar1774,4);
            auVar736 = vmulps_avx512f(in_ZMM22,in_ZMM22);
            auVar731 = vfmadd213ps_avx512f(auVar721,auVar736,auVar722);
            auVar731 = vfmadd213ps_avx512f(auVar731,auVar736,auVar723);
            auVar732 = vfmadd213ps_avx512f(auVar725,auVar736,auVar726);
            auVar732 = vfmadd213ps_avx512f(auVar732,auVar736,auVar727);
            auVar731 = vfmadd213ps_avx512f(auVar731,auVar736,auVar724);
            auVar732 = vfmadd213ps_avx512f(auVar732,auVar736,auVar728);
            auVar736 = vfmadd213ps_avx512f(auVar732,auVar736,auVar720);
            auVar736 = vfmadd231ps_avx512f(auVar736,in_ZMM22,auVar731);
            uVar431 = vcmpps_avx512f(auVar737,auVar1774,1);
            auVar733 = vmulps_avx512f(auVar736,auVar733);
            auVar736 = vaddps_avx512f(auVar733,auVar729);
            bVar12 = (bool)((byte)uVar430 & 1);
            auVar854._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * auVar733._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar854._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * auVar733._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar854._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * auVar733._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar854._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * auVar733._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar854._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * auVar733._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar854._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * auVar733._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar854._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * auVar733._24_4_;
            bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
            auVar854._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * auVar733._28_4_;
            bVar12 = (bool)(bVar29 & 1);
            auVar854._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * auVar733._32_4_;
            bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
            auVar854._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * auVar733._36_4_;
            bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
            auVar854._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * auVar733._40_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
            auVar854._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * auVar733._44_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
            auVar854._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * auVar733._48_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
            auVar854._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * auVar733._52_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
            auVar854._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * auVar733._56_4_;
            bVar12 = SUB81(uVar430 >> 0xf,0);
            auVar854._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * auVar733._60_4_;
            auVar737 = vpternlogd_avx512f(auVar737,auVar717,auVar730,0xea);
            auVar733 = vpternlogd_avx512f(auVar854,auVar852,auVar717,0xf8);
            uVar430 = vcmpps_avx512f(auVar737,auVar1774,1);
            auVar737 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar736 = vaddps_avx512f(auVar733,auVar718);
            bVar12 = (bool)((byte)uVar431 & 1);
            in_ZMM21._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * auVar733._0_4_;
            bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
            in_ZMM21._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * auVar733._4_4_;
            bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
            in_ZMM21._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * auVar733._8_4_;
            bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
            in_ZMM21._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * auVar733._12_4_;
            bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
            in_ZMM21._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * auVar733._16_4_;
            bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
            in_ZMM21._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * auVar733._20_4_;
            bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
            in_ZMM21._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * auVar733._24_4_;
            bVar12 = (bool)((byte)(uVar431 >> 7) & 1);
            in_ZMM21._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * auVar733._28_4_;
            bVar12 = (bool)((byte)(uVar431 >> 8) & 1);
            in_ZMM21._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * auVar733._32_4_;
            bVar12 = (bool)((byte)(uVar431 >> 9) & 1);
            in_ZMM21._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * auVar733._36_4_;
            bVar12 = (bool)((byte)(uVar431 >> 10) & 1);
            in_ZMM21._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * auVar733._40_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xb) & 1);
            in_ZMM21._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * auVar733._44_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xc) & 1);
            in_ZMM21._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * auVar733._48_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xd) & 1);
            in_ZMM21._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * auVar733._52_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xe) & 1);
            in_ZMM21._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * auVar733._56_4_;
            bVar12 = SUB81(uVar431 >> 0xf,0);
            in_ZMM21._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * auVar733._60_4_;
            auVar733 = vblendmps_avx512f(auVar716,in_ZMM21);
            bVar12 = (bool)((byte)uVar429 & 1);
            bVar14 = (bool)((byte)(uVar429 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar429 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar429 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar429 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar429 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar429 >> 6) & 1);
            bVar20 = (bool)((byte)(uVar429 >> 7) & 1);
            bVar21 = (bool)((byte)(uVar429 >> 8) & 1);
            bVar22 = (bool)((byte)(uVar429 >> 9) & 1);
            bVar23 = (bool)((byte)(uVar429 >> 10) & 1);
            bVar24 = (bool)((byte)(uVar429 >> 0xb) & 1);
            bVar25 = (bool)((byte)(uVar429 >> 0xc) & 1);
            bVar26 = (bool)((byte)(uVar429 >> 0xd) & 1);
            bVar27 = (bool)((byte)(uVar429 >> 0xe) & 1);
            bVar28 = SUB81(uVar429 >> 0xf,0);
            bVar13 = (bool)((byte)uVar47 & 1);
            auVar673._0_4_ =
                 (uint)bVar13 * ((uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar852._0_4_) |
                 (uint)!bVar13 * (uint)((byte)uVar430 & 1) * auVar737._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar673._4_4_ =
                 (uint)bVar12 * ((uint)bVar14 * auVar733._4_4_ | (uint)!bVar14 * auVar852._4_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 1) & 1) * auVar737._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar673._8_4_ =
                 (uint)bVar12 * ((uint)bVar15 * auVar733._8_4_ | (uint)!bVar15 * auVar852._8_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 2) & 1) * auVar737._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar673._12_4_ =
                 (uint)bVar12 * ((uint)bVar16 * auVar733._12_4_ | (uint)!bVar16 * auVar852._12_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 3) & 1) * auVar737._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar673._16_4_ =
                 (uint)bVar12 * ((uint)bVar17 * auVar733._16_4_ | (uint)!bVar17 * auVar852._16_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 4) & 1) * auVar737._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar673._20_4_ =
                 (uint)bVar12 * ((uint)bVar18 * auVar733._20_4_ | (uint)!bVar18 * auVar852._20_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 5) & 1) * auVar737._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar673._24_4_ =
                 (uint)bVar12 * ((uint)bVar19 * auVar733._24_4_ | (uint)!bVar19 * auVar852._24_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 6) & 1) * auVar737._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar673._28_4_ =
                 (uint)bVar12 * ((uint)bVar20 * auVar733._28_4_ | (uint)!bVar20 * auVar852._28_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 7) & 1) * auVar737._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            auVar855._32_4_ =
                 (uint)bVar12 * ((uint)bVar21 * auVar733._32_4_ | (uint)!bVar21 * auVar852._32_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 8) & 1) * auVar737._32_4_;
            auVar855._0_32_ = auVar673;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar855._36_4_ =
                 (uint)bVar12 * ((uint)bVar22 * auVar733._36_4_ | (uint)!bVar22 * auVar852._36_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 9) & 1) * auVar737._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar855._40_4_ =
                 (uint)bVar12 * ((uint)bVar23 * auVar733._40_4_ | (uint)!bVar23 * auVar852._40_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 10) & 1) * auVar737._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar855._44_4_ =
                 (uint)bVar12 * ((uint)bVar24 * auVar733._44_4_ | (uint)!bVar24 * auVar852._44_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 0xb) & 1) * auVar737._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar855._48_4_ =
                 (uint)bVar12 * ((uint)bVar25 * auVar733._48_4_ | (uint)!bVar25 * auVar852._48_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 0xc) & 1) * auVar737._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar855._52_4_ =
                 (uint)bVar12 * ((uint)bVar26 * auVar733._52_4_ | (uint)!bVar26 * auVar852._52_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 0xd) & 1) * auVar737._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar855._56_4_ =
                 (uint)bVar12 * ((uint)bVar27 * auVar733._56_4_ | (uint)!bVar27 * auVar852._56_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 0xe) & 1) * auVar737._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar855._60_4_ =
                 (uint)bVar12 * ((uint)bVar28 * auVar733._60_4_ | (uint)!bVar28 * auVar852._60_4_) |
                 (uint)!bVar12 * (uint)(byte)(uVar430 >> 0xf) * auVar737._60_4_;
            *(undefined1 (*) [64])outptr = auVar855;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        if ((int)(uVar425 | 7) < (int)uVar427) {
          auVar460 = ZEXT816(0) << 0x40;
          auVar167._8_4_ = 0x80000000;
          auVar167._0_8_ = 0x8000000080000000;
          auVar167._12_4_ = 0x80000000;
          auVar167._16_4_ = 0x80000000;
          auVar167._20_4_ = 0x80000000;
          auVar167._24_4_ = 0x80000000;
          auVar167._28_4_ = 0x80000000;
          vandps_avx512vl(auVar563,auVar167);
          uVar47 = vcmpps_avx512vl(auVar563,ZEXT1632(auVar460),4);
          uVar430 = vcmpps_avx512vl(auVar563,ZEXT1632(auVar460),1);
          auVar674 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
          bVar12 = (bool)((byte)uVar430 & 1);
          auVar675._0_4_ = (uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar675._4_4_ = (uint)bVar12 * auVar674._4_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar675._8_4_ = (uint)bVar12 * auVar674._8_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar675._12_4_ = (uint)bVar12 * auVar674._12_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar675._16_4_ = (uint)bVar12 * auVar674._16_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar675._20_4_ = (uint)bVar12 * auVar674._20_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar675._24_4_ = (uint)bVar12 * auVar674._24_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = SUB81(uVar430 >> 7,0);
          auVar675._28_4_ = (uint)bVar12 * auVar674._28_4_ | (uint)!bVar12 * 0x40490fdb;
          auVar168._8_4_ = 0x3fc90fdb;
          auVar168._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar168._12_4_ = 0x3fc90fdb;
          auVar168._16_4_ = 0x3fc90fdb;
          auVar168._20_4_ = 0x3fc90fdb;
          auVar168._24_4_ = 0x3fc90fdb;
          auVar168._28_4_ = 0x3fc90fdb;
          auVar674 = vorps_avx512vl(auVar673,auVar168);
          auVar676._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar674._4_4_;
          auVar676._0_4_ = (uint)((byte)uVar47 & 1) * auVar674._0_4_;
          auVar676._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar674._8_4_;
          auVar676._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar674._12_4_;
          auVar676._16_4_ = (uint)((byte)(uVar47 >> 4) & 1) * auVar674._16_4_;
          auVar676._20_4_ = (uint)((byte)(uVar47 >> 5) & 1) * auVar674._20_4_;
          auVar676._24_4_ = (uint)((byte)(uVar47 >> 6) & 1) * auVar674._24_4_;
          auVar676._28_4_ = (uint)(byte)(uVar47 >> 7) * auVar674._28_4_;
          auVar1273._8_4_ = 0x80000000;
          auVar1273._0_8_ = 0x8000000080000000;
          auVar1273._12_4_ = 0x80000000;
          auVar1273._16_4_ = 0x80000000;
          auVar1273._20_4_ = 0x80000000;
          auVar1273._24_4_ = 0x80000000;
          auVar1273._28_4_ = 0x80000000;
          auVar1333._8_4_ = 0x7fffffff;
          auVar1333._0_8_ = 0x7fffffff7fffffff;
          auVar1333._12_4_ = 0x7fffffff;
          auVar1333._16_4_ = 0x7fffffff;
          auVar1333._20_4_ = 0x7fffffff;
          auVar1333._24_4_ = 0x7fffffff;
          auVar1333._28_4_ = 0x7fffffff;
          auVar1389._8_4_ = 0x3f800000;
          auVar1389._0_8_ = 0x3f8000003f800000;
          auVar1389._12_4_ = 0x3f800000;
          auVar1389._16_4_ = 0x3f800000;
          auVar1389._20_4_ = 0x3f800000;
          auVar1389._24_4_ = 0x3f800000;
          auVar1389._28_4_ = 0x3f800000;
          auVar1446._8_4_ = 0xbc83a25c;
          auVar1446._0_8_ = 0xbc83a25cbc83a25c;
          auVar1446._12_4_ = 0xbc83a25c;
          auVar1446._16_4_ = 0xbc83a25c;
          auVar1446._20_4_ = 0xbc83a25c;
          auVar1446._24_4_ = 0xbc83a25c;
          auVar1446._28_4_ = 0xbc83a25c;
          auVar1500._8_4_ = 0xbd99b01e;
          auVar1500._0_8_ = 0xbd99b01ebd99b01e;
          auVar1500._12_4_ = 0xbd99b01e;
          auVar1500._16_4_ = 0xbd99b01e;
          auVar1500._20_4_ = 0xbd99b01e;
          auVar1500._24_4_ = 0xbd99b01e;
          auVar1500._28_4_ = 0xbd99b01e;
          auVar1554._8_4_ = 0xbe117200;
          auVar1554._0_8_ = 0xbe117200be117200;
          auVar1554._12_4_ = 0xbe117200;
          auVar1554._16_4_ = 0xbe117200;
          auVar1554._20_4_ = 0xbe117200;
          auVar1554._24_4_ = 0xbe117200;
          auVar1554._28_4_ = 0xbe117200;
          auVar1608._8_4_ = 0xbeaaaa53;
          auVar1608._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1608._12_4_ = 0xbeaaaa53;
          auVar1608._16_4_ = 0xbeaaaa53;
          auVar1608._20_4_ = 0xbeaaaa53;
          auVar1608._24_4_ = 0xbeaaaa53;
          auVar1608._28_4_ = 0xbeaaaa53;
          auVar1662._8_4_ = 0x3b3ac537;
          auVar1662._0_8_ = 0x3b3ac5373b3ac537;
          auVar1662._12_4_ = 0x3b3ac537;
          auVar1662._16_4_ = 0x3b3ac537;
          auVar1662._20_4_ = 0x3b3ac537;
          auVar1662._24_4_ = 0x3b3ac537;
          auVar1662._28_4_ = 0x3b3ac537;
          auVar1716._8_4_ = 0x3d2edd4e;
          auVar1716._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1716._12_4_ = 0x3d2edd4e;
          auVar1716._16_4_ = 0x3d2edd4e;
          auVar1716._20_4_ = 0x3d2edd4e;
          auVar1716._24_4_ = 0x3d2edd4e;
          auVar1716._28_4_ = 0x3d2edd4e;
          auVar1766._8_4_ = 0x3dd9ed24;
          auVar1766._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1766._12_4_ = 0x3dd9ed24;
          auVar1766._16_4_ = 0x3dd9ed24;
          auVar1766._20_4_ = 0x3dd9ed24;
          auVar1766._24_4_ = 0x3dd9ed24;
          auVar1766._28_4_ = 0x3dd9ed24;
          auVar1816._8_4_ = 0x3e4cb974;
          auVar1816._0_8_ = 0x3e4cb9743e4cb974;
          auVar1816._12_4_ = 0x3e4cb974;
          auVar1816._16_4_ = 0x3e4cb974;
          auVar1816._20_4_ = 0x3e4cb974;
          auVar1816._24_4_ = 0x3e4cb974;
          auVar1816._28_4_ = 0x3e4cb974;
          auVar674 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          auVar677 = vbroadcastss_avx512vl(ZEXT416(0x40490fdb));
          auVar678 = vorps_avx512vl(auVar676,auVar677);
          uVar882 = uVar425;
          do {
            auVar562 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
            auVar679 = vdivps_avx512vl(auVar563,auVar562);
            vandps_avx512vl(auVar679,auVar1333);
            uVar430 = vcmpps_avx512vl(auVar1389,auVar679,1);
            auVar169._8_4_ = 0xbf800000;
            auVar169._0_8_ = 0xbf800000bf800000;
            auVar169._12_4_ = 0xbf800000;
            auVar169._16_4_ = 0xbf800000;
            auVar169._20_4_ = 0xbf800000;
            auVar169._24_4_ = 0xbf800000;
            auVar169._28_4_ = 0xbf800000;
            auVar680 = vblendmps_avx512vl(auVar679,auVar169);
            bVar29 = (byte)uVar430;
            auVar681._0_4_ =
                 (uint)(bVar29 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM22._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar681._4_4_ = (uint)bVar12 * auVar680._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar681._8_4_ = (uint)bVar12 * auVar680._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar681._12_4_ = (uint)bVar12 * auVar680._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar681._16_4_ = (uint)bVar12 * auVar680._16_4_ | (uint)!bVar12 * in_ZMM22._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar681._20_4_ = (uint)bVar12 * auVar680._20_4_ | (uint)!bVar12 * in_ZMM22._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar681._24_4_ = (uint)bVar12 * auVar680._24_4_ | (uint)!bVar12 * in_ZMM22._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar681._28_4_ = (uint)bVar12 * auVar680._28_4_ | (uint)!bVar12 * in_ZMM22._28_4_;
            auVar680 = vdivps_avx512vl(auVar681,auVar679);
            auVar682._0_4_ =
                 (uint)(bVar29 & 1) * auVar680._0_4_ | !(bool)(bVar29 & 1) * auVar681._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar682._4_4_ = (uint)bVar12 * auVar680._4_4_ | !bVar12 * auVar681._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar682._8_4_ = (uint)bVar12 * auVar680._8_4_ | !bVar12 * auVar681._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar682._12_4_ = (uint)bVar12 * auVar680._12_4_ | !bVar12 * auVar681._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar682._16_4_ = (uint)bVar12 * auVar680._16_4_ | !bVar12 * auVar681._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar682._20_4_ = (uint)bVar12 * auVar680._20_4_ | !bVar12 * auVar681._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar682._24_4_ = (uint)bVar12 * auVar680._24_4_ | !bVar12 * auVar681._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar682._28_4_ = (uint)bVar12 * auVar680._28_4_ | !bVar12 * auVar681._28_4_;
            in_ZMM22 = ZEXT3264(auVar682);
            auVar680 = vmulps_avx512vl(auVar682,auVar682);
            auVar683 = vmulps_avx512vl(auVar680,auVar680);
            auVar701 = ZEXT1632(auVar460);
            uVar429 = vcmpps_avx512vl(auVar562,auVar701,4);
            uVar429 = uVar47 & uVar429;
            auVar684 = vfmadd213ps_avx512vl(auVar1446,auVar683,auVar1500);
            auVar684 = vfmadd213ps_avx512vl(auVar684,auVar683,auVar1554);
            auVar685 = vfmadd213ps_avx512vl(auVar1662,auVar683,auVar1716);
            auVar685 = vfmadd213ps_avx512vl(auVar685,auVar683,auVar1766);
            auVar685 = vfmadd213ps_avx512vl(auVar685,auVar683,auVar1816);
            auVar684 = vfmadd213ps_avx512vl(auVar684,auVar683,auVar1608);
            auVar683 = vfmadd213ps_avx512vl(auVar685,auVar683,auVar1389);
            auVar680 = vfmadd231ps_avx512vl(auVar683,auVar680,auVar684);
            auVar680 = vmulps_avx512vl(auVar680,auVar682);
            uVar431 = vcmpps_avx512vl(auVar562,auVar701,1);
            auVar683 = vaddps_avx512vl(auVar680,auVar674);
            auVar686._0_4_ =
                 (uint)(bVar29 & 1) * auVar683._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar680._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar686._4_4_ = (uint)bVar12 * auVar683._4_4_ | (uint)!bVar12 * auVar680._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar686._8_4_ = (uint)bVar12 * auVar683._8_4_ | (uint)!bVar12 * auVar680._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar686._12_4_ = (uint)bVar12 * auVar683._12_4_ | (uint)!bVar12 * auVar680._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar686._16_4_ = (uint)bVar12 * auVar683._16_4_ | (uint)!bVar12 * auVar680._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar686._20_4_ = (uint)bVar12 * auVar683._20_4_ | (uint)!bVar12 * auVar680._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar686._24_4_ = (uint)bVar12 * auVar683._24_4_ | (uint)!bVar12 * auVar680._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar686._28_4_ = (uint)bVar12 * auVar683._28_4_ | (uint)!bVar12 * auVar680._28_4_;
            auVar679 = vpternlogd_avx512vl(auVar686,auVar679,auVar1273,0xf8);
            auVar562 = vpternlogd_avx512vl(auVar562,auVar677,auVar1273,0xec);
            auVar680 = vaddps_avx512vl(auVar679,auVar675);
            bVar12 = (bool)((byte)uVar431 & 1);
            uVar425 = (uint)bVar12 * auVar680._0_4_ | (uint)!bVar12 * auVar679._0_4_;
            bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
            uVar883 = (uint)bVar12 * auVar680._4_4_ | (uint)!bVar12 * auVar679._4_4_;
            bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
            uVar884 = (uint)bVar12 * auVar680._8_4_ | (uint)!bVar12 * auVar679._8_4_;
            bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
            uVar885 = (uint)bVar12 * auVar680._12_4_ | (uint)!bVar12 * auVar679._12_4_;
            bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
            uVar886 = (uint)bVar12 * auVar680._16_4_ | (uint)!bVar12 * auVar679._16_4_;
            bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
            uVar887 = (uint)bVar12 * auVar680._20_4_ | (uint)!bVar12 * auVar679._20_4_;
            bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
            uVar888 = (uint)bVar12 * auVar680._24_4_ | (uint)!bVar12 * auVar679._24_4_;
            bVar12 = SUB81(uVar431 >> 7,0);
            uVar889 = (uint)bVar12 * auVar680._28_4_ | (uint)!bVar12 * auVar679._28_4_;
            in_ZMM21 = ZEXT3264(CONCAT428(uVar889,CONCAT424(uVar888,CONCAT420(uVar887,CONCAT416(
                                                  uVar886,CONCAT412(uVar885,CONCAT48(uVar884,
                                                  CONCAT44(uVar883,uVar425))))))));
            uVar46 = vcmpps_avx512vl(auVar701,auVar562,2);
            bVar29 = (byte)uVar47 | (byte)uVar46;
            auVar679 = vpblendmd_avx512vl(auVar678,auVar676);
            bVar13 = (bool)(bVar29 >> 1 & 1);
            bVar15 = (bool)(bVar29 >> 2 & 1);
            bVar17 = (bool)(bVar29 >> 3 & 1);
            bVar19 = (bool)(bVar29 >> 4 & 1);
            bVar21 = (bool)(bVar29 >> 5 & 1);
            bVar23 = (bool)(bVar29 >> 6 & 1);
            bVar12 = (bool)((byte)uVar429 & 1);
            bVar14 = (bool)((byte)(uVar429 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar429 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar429 >> 3) & 1);
            bVar20 = (bool)((byte)(uVar429 >> 4) & 1);
            bVar22 = (bool)((byte)(uVar429 >> 5) & 1);
            bVar24 = (bool)((byte)(uVar429 >> 6) & 1);
            bVar25 = SUB81(uVar429 >> 7,0);
            *(uint *)*(undefined1 (*) [64])outptr =
                 bVar12 * uVar425 |
                 (uint)!bVar12 *
                 ((uint)(bVar29 & 1) * auVar679._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar562._0_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
                 bVar14 * uVar883 |
                 (uint)!bVar14 * ((uint)bVar13 * auVar679._4_4_ | (uint)!bVar13 * auVar562._4_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
                 bVar16 * uVar884 |
                 (uint)!bVar16 * ((uint)bVar15 * auVar679._8_4_ | (uint)!bVar15 * auVar562._8_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
                 bVar18 * uVar885 |
                 (uint)!bVar18 * ((uint)bVar17 * auVar679._12_4_ | (uint)!bVar17 * auVar562._12_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x10) =
                 bVar20 * uVar886 |
                 (uint)!bVar20 * ((uint)bVar19 * auVar679._16_4_ | (uint)!bVar19 * auVar562._16_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x14) =
                 bVar22 * uVar887 |
                 (uint)!bVar22 * ((uint)bVar21 * auVar679._20_4_ | (uint)!bVar21 * auVar562._20_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x18) =
                 bVar24 * uVar888 |
                 (uint)!bVar24 * ((uint)bVar23 * auVar679._24_4_ | (uint)!bVar23 * auVar562._24_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x1c) =
                 bVar25 * uVar889 |
                 (uint)!bVar25 *
                 ((uint)(bVar29 >> 7) * auVar679._28_4_ |
                 (uint)!(bool)(bVar29 >> 7) * auVar562._28_4_);
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)(uVar425 | 3) < (int)uVar427) {
          auVar519 = ZEXT816(0) << 0x20;
          auVar439._8_4_ = 0x80000000;
          auVar439._0_8_ = 0x8000000080000000;
          auVar439._12_4_ = 0x80000000;
          auVar460 = vandps_avx512vl(auVar442,auVar439);
          uVar47 = vcmpps_avx512vl(auVar442,auVar519,4);
          uVar430 = vcmpps_avx512vl(auVar442,auVar519,1);
          auVar461 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
          bVar12 = (bool)((byte)uVar430 & 1);
          auVar462._0_4_ = (uint)bVar12 * auVar461._0_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar462._4_4_ = (uint)bVar12 * auVar461._4_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar462._8_4_ = (uint)bVar12 * auVar461._8_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar462._12_4_ = (uint)bVar12 * auVar461._12_4_ | (uint)!bVar12 * 0x40490fdb;
          auVar440._8_4_ = 0x3fc90fdb;
          auVar440._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar440._12_4_ = 0x3fc90fdb;
          auVar460 = vorps_avx512vl(auVar460,auVar440);
          auVar463._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar460._4_4_;
          auVar463._0_4_ = (uint)((byte)uVar47 & 1) * auVar460._0_4_;
          auVar463._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar460._8_4_;
          auVar463._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar460._12_4_;
          auVar1166._8_4_ = 0x80000000;
          auVar1166._0_8_ = 0x8000000080000000;
          auVar1166._12_4_ = 0x80000000;
          auVar1220._8_4_ = 0x7fffffff;
          auVar1220._0_8_ = 0x7fffffff7fffffff;
          auVar1220._12_4_ = 0x7fffffff;
          auVar1284._8_4_ = 0x3f800000;
          auVar1284._0_8_ = 0x3f8000003f800000;
          auVar1284._12_4_ = 0x3f800000;
          auVar1347._8_4_ = 0xbc83a25c;
          auVar1347._0_8_ = 0xbc83a25cbc83a25c;
          auVar1347._12_4_ = 0xbc83a25c;
          auVar1403._8_4_ = 0xbd99b01e;
          auVar1403._0_8_ = 0xbd99b01ebd99b01e;
          auVar1403._12_4_ = 0xbd99b01e;
          auVar1457._8_4_ = 0xbe117200;
          auVar1457._0_8_ = 0xbe117200be117200;
          auVar1457._12_4_ = 0xbe117200;
          auVar1511._8_4_ = 0xbeaaaa53;
          auVar1511._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1511._12_4_ = 0xbeaaaa53;
          auVar1565._8_4_ = 0x3b3ac537;
          auVar1565._0_8_ = 0x3b3ac5373b3ac537;
          auVar1565._12_4_ = 0x3b3ac537;
          auVar1619._8_4_ = 0x3d2edd4e;
          auVar1619._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1619._12_4_ = 0x3d2edd4e;
          auVar1673._8_4_ = 0x3dd9ed24;
          auVar1673._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1673._12_4_ = 0x3dd9ed24;
          auVar1727._8_4_ = 0x3e4cb974;
          auVar1727._0_8_ = 0x3e4cb9743e4cb974;
          auVar1727._12_4_ = 0x3e4cb974;
          auVar1779._8_4_ = 0x3fc90fdb;
          auVar1779._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1779._12_4_ = 0x3fc90fdb;
          auVar460 = vbroadcastss_avx512vl(ZEXT416(0x40490fdb));
          auVar461 = vorps_avx512vl(auVar463,auVar460);
          uVar882 = uVar425;
          do {
            auVar472 = *(undefined1 (*) [16])*(undefined1 (*) [64])ptr;
            auVar464 = vdivps_avx512vl(auVar442,auVar472);
            auVar465 = vandps_avx512vl(auVar464,auVar1220);
            uVar430 = vcmpps_avx512vl(auVar1284,auVar465,1);
            auVar49._8_4_ = 0xbf800000;
            auVar49._0_8_ = 0xbf800000bf800000;
            auVar49._12_4_ = 0xbf800000;
            auVar466 = vblendmps_avx512vl(auVar465,auVar49);
            bVar29 = (byte)uVar430;
            auVar467._0_4_ =
                 (uint)(bVar29 & 1) * auVar466._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM21._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar467._4_4_ = (uint)bVar12 * auVar466._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar467._8_4_ = (uint)bVar12 * auVar466._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar467._12_4_ = (uint)bVar12 * auVar466._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
            auVar465 = vdivps_avx512vl(auVar467,auVar465);
            auVar468._0_4_ =
                 (uint)(bVar29 & 1) * auVar465._0_4_ | !(bool)(bVar29 & 1) * auVar467._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar468._4_4_ = (uint)bVar12 * auVar465._4_4_ | !bVar12 * auVar467._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar468._8_4_ = (uint)bVar12 * auVar465._8_4_ | !bVar12 * auVar467._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar468._12_4_ = (uint)bVar12 * auVar465._12_4_ | !bVar12 * auVar467._12_4_;
            in_ZMM21 = ZEXT1664(auVar468);
            auVar465 = vmulps_avx512vl(auVar468,auVar468);
            auVar466 = vmulps_avx512vl(auVar465,auVar465);
            uVar429 = vcmpps_avx512vl(auVar472,auVar519,4);
            uVar429 = uVar47 & uVar429;
            auVar469 = vfmadd213ps_avx512vl(auVar1347,auVar466,auVar1403);
            auVar469 = vfmadd213ps_avx512vl(auVar469,auVar466,auVar1457);
            auVar470 = vfmadd213ps_avx512vl(auVar1565,auVar466,auVar1619);
            auVar470 = vfmadd213ps_avx512vl(auVar470,auVar466,auVar1673);
            auVar470 = vfmadd213ps_avx512vl(auVar470,auVar466,auVar1727);
            auVar469 = vfmadd213ps_avx512vl(auVar469,auVar466,auVar1511);
            auVar466 = vfmadd213ps_avx512vl(auVar470,auVar466,auVar1284);
            auVar465 = vfmadd231ps_avx512vl(auVar466,auVar465,auVar469);
            auVar465 = vmulps_avx512vl(auVar465,auVar468);
            uVar431 = vcmpps_avx512vl(auVar472,auVar519,1);
            auVar466 = vaddps_avx512vl(auVar465,auVar1779);
            auVar471._0_4_ =
                 (uint)(bVar29 & 1) * auVar466._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar465._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar471._4_4_ = (uint)bVar12 * auVar466._4_4_ | (uint)!bVar12 * auVar465._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar471._8_4_ = (uint)bVar12 * auVar466._8_4_ | (uint)!bVar12 * auVar465._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar471._12_4_ = (uint)bVar12 * auVar466._12_4_ | (uint)!bVar12 * auVar465._12_4_;
            auVar464 = vpternlogd_avx512vl(auVar471,auVar464,auVar1166,0xf8);
            auVar472 = vpternlogd_avx512vl(auVar472,auVar460,auVar1166,0xec);
            auVar465 = vaddps_avx512vl(auVar464,auVar462);
            bVar12 = (bool)((byte)uVar431 & 1);
            bVar15 = (bool)((byte)(uVar431 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar431 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar431 >> 3) & 1);
            uVar46 = vcmpps_avx512vl(auVar519,auVar472,2);
            uVar48 = (ushort)uVar47 | (ushort)uVar46;
            auVar466 = vpblendmd_avx512vl(auVar461,auVar463);
            bVar13 = (bool)((byte)uVar48 & 1);
            bVar16 = (bool)((byte)(uVar48 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar48 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar48 >> 3) & 1);
            bVar14 = (bool)((byte)uVar429 & 1);
            bVar17 = (bool)((byte)(uVar429 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar429 >> 2) & 1);
            bVar23 = (bool)((byte)(uVar429 >> 3) & 1);
            *(uint *)*(undefined1 (*) [64])outptr =
                 (uint)bVar14 * ((uint)bVar12 * auVar465._0_4_ | (uint)!bVar12 * auVar464._0_4_) |
                 (uint)!bVar14 * ((uint)bVar13 * auVar466._0_4_ | (uint)!bVar13 * auVar472._0_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
                 (uint)bVar17 * ((uint)bVar15 * auVar465._4_4_ | (uint)!bVar15 * auVar464._4_4_) |
                 (uint)!bVar17 * ((uint)bVar16 * auVar466._4_4_ | (uint)!bVar16 * auVar472._4_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
                 (uint)bVar20 * ((uint)bVar18 * auVar465._8_4_ | (uint)!bVar18 * auVar464._8_4_) |
                 (uint)!bVar20 * ((uint)bVar19 * auVar466._8_4_ | (uint)!bVar19 * auVar472._8_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
                 (uint)bVar23 * ((uint)bVar21 * auVar465._12_4_ | (uint)!bVar21 * auVar464._12_4_) |
                 (uint)!bVar23 * ((uint)bVar22 * auVar466._12_4_ | (uint)!bVar22 * auVar472._12_4_);
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
            uVar425 = uVar882 + 4;
            iVar424 = uVar882 + 7;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          return;
        }
        lVar428 = 0;
        do {
          fVar891 = atan2f(fVar890,*(float *)(*(undefined1 (*) [64])ptr + lVar428 * 4));
          *(float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = fVar891;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
      if (aw == 1) {
        fVar890 = *ptr;
        if (iVar424 == 4) {
          auVar442 = vmovdqa64_avx512vl(ZEXT416((uint)fVar890));
          auVar906 = *(undefined1 (*) [16])ptr;
        }
        else {
          auVar442 = vmovdqa64_avx512vl(ZEXT416((uint)fVar890));
          auVar906._4_4_ = fVar890;
          auVar906._0_4_ = fVar890;
          auVar906._8_4_ = fVar890;
          auVar906._12_4_ = fVar890;
        }
        if (iVar424 == 8) {
          auVar717 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar717._0_16_ = ZEXT116(0) * auVar906 + ZEXT116(1) * auVar906;
          auVar717._16_16_ = ZEXT116(1) * auVar906;
          auVar717._32_32_ = auVar734._32_32_;
        }
        auVar674 = auVar717._0_32_;
        if (iVar424 == 0x10) {
          auVar734 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
        }
        else {
          auVar734 = vinserti64x4_avx512f(auVar717,auVar674,1);
        }
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          auVar716 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar719._8_4_ = 0x80000000;
          auVar719._0_8_ = 0x8000000080000000;
          auVar719._12_4_ = 0x80000000;
          auVar719._16_4_ = 0x80000000;
          auVar719._20_4_ = 0x80000000;
          auVar719._24_4_ = 0x80000000;
          auVar719._28_4_ = 0x80000000;
          auVar719._32_4_ = 0x80000000;
          auVar719._36_4_ = 0x80000000;
          auVar719._40_4_ = 0x80000000;
          auVar719._44_4_ = 0x80000000;
          auVar719._48_4_ = 0x80000000;
          auVar719._52_4_ = 0x80000000;
          auVar719._56_4_ = 0x80000000;
          auVar719._60_4_ = 0x80000000;
          auVar716 = vpternlogd_avx512f(auVar716,auVar734,auVar719,0xf8);
          auVar737 = ZEXT1264(ZEXT812(0));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          uVar47 = vcmpps_avx512f(auVar716,auVar737,1);
          auVar716 = vdivps_avx512f(auVar717,auVar734);
          auVar718 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar720._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar718._4_4_;
          auVar720._0_4_ = (uint)((byte)uVar47 & 1) * auVar718._0_4_;
          auVar720._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar718._8_4_;
          auVar720._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar718._12_4_;
          auVar720._16_4_ = (uint)((byte)(uVar47 >> 4) & 1) * auVar718._16_4_;
          auVar720._20_4_ = (uint)((byte)(uVar47 >> 5) & 1) * auVar718._20_4_;
          auVar720._24_4_ = (uint)((byte)(uVar47 >> 6) & 1) * auVar718._24_4_;
          auVar720._28_4_ = (uint)((byte)(uVar47 >> 7) & 1) * auVar718._28_4_;
          auVar720._32_4_ = (uint)((byte)(uVar47 >> 8) & 1) * auVar718._32_4_;
          auVar720._36_4_ = (uint)((byte)(uVar47 >> 9) & 1) * auVar718._36_4_;
          auVar720._40_4_ = (uint)((byte)(uVar47 >> 10) & 1) * auVar718._40_4_;
          auVar720._44_4_ = (uint)((byte)(uVar47 >> 0xb) & 1) * auVar718._44_4_;
          auVar720._48_4_ = (uint)((byte)(uVar47 >> 0xc) & 1) * auVar718._48_4_;
          auVar720._52_4_ = (uint)((byte)(uVar47 >> 0xd) & 1) * auVar718._52_4_;
          auVar720._56_4_ = (uint)((byte)(uVar47 >> 0xe) & 1) * auVar718._56_4_;
          auVar720._60_4_ = (uint)(byte)(uVar47 >> 0xf) * auVar718._60_4_;
          iVar424 = 0xf;
          uVar47 = vcmpps_avx512f(auVar734,auVar737,1);
          auVar718 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar725 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar726 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar727 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar728 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar729 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar730 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          uVar430 = vcmpps_avx512f(auVar734,auVar737,4);
          auVar1774 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar734 = in_ZMM22;
          do {
            auVar852 = *(undefined1 (*) [64])ptr1;
            auVar733 = vmulps_avx512f(auVar852,auVar716);
            uVar429 = vcmpps_avx512f(auVar852,auVar737,1);
            auVar736 = vandps_avx512dq(auVar733,auVar721);
            auVar324._8_4_ = 0xc0490fdb;
            auVar324._0_8_ = 0xc0490fdbc0490fdb;
            auVar324._12_4_ = 0xc0490fdb;
            auVar324._16_4_ = 0xc0490fdb;
            auVar324._20_4_ = 0xc0490fdb;
            auVar324._24_4_ = 0xc0490fdb;
            auVar324._28_4_ = 0xc0490fdb;
            auVar324._32_4_ = 0xc0490fdb;
            auVar324._36_4_ = 0xc0490fdb;
            auVar324._40_4_ = 0xc0490fdb;
            auVar324._44_4_ = 0xc0490fdb;
            auVar324._48_4_ = 0xc0490fdb;
            auVar324._52_4_ = 0xc0490fdb;
            auVar324._56_4_ = 0xc0490fdb;
            auVar324._60_4_ = 0xc0490fdb;
            auVar731 = vblendmps_avx512f(auVar719,auVar324);
            bVar12 = (bool)((byte)uVar429 & 1);
            in_ZMM22._0_4_ = (uint)bVar12 * auVar731._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
            in_ZMM22._4_4_ = (uint)bVar12 * auVar731._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
            in_ZMM22._8_4_ = (uint)bVar12 * auVar731._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
            in_ZMM22._12_4_ = (uint)bVar12 * auVar731._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
            in_ZMM22._16_4_ = (uint)bVar12 * auVar731._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
            in_ZMM22._20_4_ = (uint)bVar12 * auVar731._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
            in_ZMM22._24_4_ = (uint)bVar12 * auVar731._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
            in_ZMM22._28_4_ = (uint)bVar12 * auVar731._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)((byte)(uVar429 >> 8) & 1);
            in_ZMM22._32_4_ = (uint)bVar12 * auVar731._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
            in_ZMM22._36_4_ = (uint)bVar12 * auVar731._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
            in_ZMM22._40_4_ = (uint)bVar12 * auVar731._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
            in_ZMM22._44_4_ = (uint)bVar12 * auVar731._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
            in_ZMM22._48_4_ = (uint)bVar12 * auVar731._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
            in_ZMM22._52_4_ = (uint)bVar12 * auVar731._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
            in_ZMM22._56_4_ = (uint)bVar12 * auVar731._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar429 >> 0xf,0);
            in_ZMM22._60_4_ = (uint)bVar12 * auVar731._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            uVar429 = vcmpps_avx512f(auVar717,auVar736,1);
            auVar325._8_4_ = 0xbf800000;
            auVar325._0_8_ = 0xbf800000bf800000;
            auVar325._12_4_ = 0xbf800000;
            auVar325._16_4_ = 0xbf800000;
            auVar325._20_4_ = 0xbf800000;
            auVar325._24_4_ = 0xbf800000;
            auVar325._28_4_ = 0xbf800000;
            auVar325._32_4_ = 0xbf800000;
            auVar325._36_4_ = 0xbf800000;
            auVar325._40_4_ = 0xbf800000;
            auVar325._44_4_ = 0xbf800000;
            auVar325._48_4_ = 0xbf800000;
            auVar325._52_4_ = 0xbf800000;
            auVar325._56_4_ = 0xbf800000;
            auVar325._60_4_ = 0xbf800000;
            auVar734 = vblendmps_avx512f(auVar736,auVar325);
            bVar12 = (bool)((byte)uVar429 & 1);
            auVar867._0_4_ = (uint)bVar12 * auVar734._0_4_ | (uint)!bVar12 * in_ZMM23._0_4_;
            bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
            auVar867._4_4_ = (uint)bVar12 * auVar734._4_4_ | (uint)!bVar12 * in_ZMM23._4_4_;
            bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
            auVar867._8_4_ = (uint)bVar12 * auVar734._8_4_ | (uint)!bVar12 * in_ZMM23._8_4_;
            bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
            auVar867._12_4_ = (uint)bVar12 * auVar734._12_4_ | (uint)!bVar12 * in_ZMM23._12_4_;
            bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
            auVar867._16_4_ = (uint)bVar12 * auVar734._16_4_ | (uint)!bVar12 * in_ZMM23._16_4_;
            bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
            auVar867._20_4_ = (uint)bVar12 * auVar734._20_4_ | (uint)!bVar12 * in_ZMM23._20_4_;
            bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
            auVar867._24_4_ = (uint)bVar12 * auVar734._24_4_ | (uint)!bVar12 * in_ZMM23._24_4_;
            bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
            auVar867._28_4_ = (uint)bVar12 * auVar734._28_4_ | (uint)!bVar12 * in_ZMM23._28_4_;
            bVar29 = (byte)(uVar429 >> 8);
            bVar12 = (bool)(bVar29 & 1);
            auVar867._32_4_ = (uint)bVar12 * auVar734._32_4_ | (uint)!bVar12 * in_ZMM23._32_4_;
            bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
            auVar867._36_4_ = (uint)bVar12 * auVar734._36_4_ | (uint)!bVar12 * in_ZMM23._36_4_;
            bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
            auVar867._40_4_ = (uint)bVar12 * auVar734._40_4_ | (uint)!bVar12 * in_ZMM23._40_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
            auVar867._44_4_ = (uint)bVar12 * auVar734._44_4_ | (uint)!bVar12 * in_ZMM23._44_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
            auVar867._48_4_ = (uint)bVar12 * auVar734._48_4_ | (uint)!bVar12 * in_ZMM23._48_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
            auVar867._52_4_ = (uint)bVar12 * auVar734._52_4_ | (uint)!bVar12 * in_ZMM23._52_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
            auVar867._56_4_ = (uint)bVar12 * auVar734._56_4_ | (uint)!bVar12 * in_ZMM23._56_4_;
            bVar12 = SUB81(uVar429 >> 0xf,0);
            auVar867._60_4_ = (uint)bVar12 * auVar734._60_4_ | (uint)!bVar12 * in_ZMM23._60_4_;
            auVar734 = vmaxps_avx512f(auVar736,auVar717);
            auVar734 = vdivps_avx512f(auVar867,auVar734);
            in_ZMM23 = vmulps_avx512f(auVar734,auVar734);
            auVar736 = vmulps_avx512f(in_ZMM23,in_ZMM23);
            auVar731 = vfmadd213ps_avx512f(auVar722,auVar736,auVar723);
            auVar731 = vfmadd213ps_avx512f(auVar731,auVar736,auVar724);
            auVar732 = vfmadd213ps_avx512f(auVar726,auVar736,auVar727);
            auVar732 = vfmadd213ps_avx512f(auVar732,auVar736,auVar728);
            auVar732 = vfmadd213ps_avx512f(auVar732,auVar736,auVar729);
            auVar731 = vfmadd213ps_avx512f(auVar731,auVar736,auVar725);
            auVar736 = vfmadd213ps_avx512f(auVar732,auVar736,auVar717);
            auVar736 = vfmadd231ps_avx512f(auVar736,in_ZMM23,auVar731);
            auVar734 = vmulps_avx512f(auVar736,auVar734);
            uVar431 = vcmpps_avx512f(auVar852,auVar737,4);
            auVar736 = vaddps_avx512f(auVar734,auVar730);
            bVar12 = (bool)((byte)uVar429 & 1);
            auVar868._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
            auVar868._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
            auVar868._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
            auVar868._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
            auVar868._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
            auVar868._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
            auVar868._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
            auVar868._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)(bVar29 & 1);
            auVar868._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
            auVar868._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
            auVar868._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
            auVar868._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
            auVar868._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
            auVar868._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
            auVar868._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar429 >> 0xf,0);
            auVar868._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            auVar734 = vpternlogd_avx512f(auVar868,auVar733,auVar718,0xf8);
            auVar733 = vaddps_avx512f(auVar734,in_ZMM22);
            bVar12 = (bool)((byte)uVar47 & 1);
            in_ZMM21._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            in_ZMM21._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            in_ZMM21._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            in_ZMM21._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            in_ZMM21._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            in_ZMM21._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            in_ZMM21._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            in_ZMM21._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            in_ZMM21._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            in_ZMM21._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            in_ZMM21._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            in_ZMM21._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            in_ZMM21._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            in_ZMM21._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            in_ZMM21._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            in_ZMM21._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            auVar734 = vpternlogd_avx512f(auVar852,auVar718,auVar1774,0xea);
            bVar12 = (bool)((byte)uVar430 & 1);
            auVar869._0_4_ = bVar12 * in_ZMM21._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar869._4_4_ = bVar12 * in_ZMM21._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar869._8_4_ = bVar12 * in_ZMM21._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar869._12_4_ = bVar12 * in_ZMM21._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar869._16_4_ = bVar12 * in_ZMM21._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar869._20_4_ = bVar12 * in_ZMM21._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar869._24_4_ = bVar12 * in_ZMM21._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
            auVar869._28_4_ = bVar12 * in_ZMM21._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)((byte)(uVar430 >> 8) & 1);
            auVar869._32_4_ = bVar12 * in_ZMM21._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
            auVar869._36_4_ = bVar12 * in_ZMM21._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
            auVar869._40_4_ = bVar12 * in_ZMM21._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
            auVar869._44_4_ = bVar12 * in_ZMM21._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
            auVar869._48_4_ = bVar12 * in_ZMM21._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
            auVar869._52_4_ = bVar12 * in_ZMM21._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
            auVar869._56_4_ = bVar12 * in_ZMM21._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar430 >> 0xf,0);
            auVar869._60_4_ = bVar12 * in_ZMM21._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            auVar734 = vblendmps_avx512f(auVar720,auVar869);
            bVar12 = (bool)((byte)uVar431 & 1);
            bVar13 = (bool)((byte)(uVar431 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar431 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar431 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar431 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar431 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar431 >> 6) & 1);
            bVar19 = (bool)((byte)(uVar431 >> 7) & 1);
            bVar20 = (bool)((byte)(uVar431 >> 8) & 1);
            bVar21 = (bool)((byte)(uVar431 >> 9) & 1);
            bVar22 = (bool)((byte)(uVar431 >> 10) & 1);
            bVar23 = (bool)((byte)(uVar431 >> 0xb) & 1);
            bVar24 = (bool)((byte)(uVar431 >> 0xc) & 1);
            bVar25 = (bool)((byte)(uVar431 >> 0xd) & 1);
            bVar26 = (bool)((byte)(uVar431 >> 0xe) & 1);
            bVar27 = SUB81(uVar431 >> 0xf,0);
            *outptr = (float)((uint)bVar12 * auVar734._0_4_ | !bVar12 * auVar869._0_4_);
            outptr[1] = (float)((uint)bVar13 * auVar734._4_4_ | !bVar13 * auVar869._4_4_);
            outptr[2] = (float)((uint)bVar14 * auVar734._8_4_ | !bVar14 * auVar869._8_4_);
            outptr[3] = (float)((uint)bVar15 * auVar734._12_4_ | !bVar15 * auVar869._12_4_);
            outptr[4] = (float)((uint)bVar16 * auVar734._16_4_ | !bVar16 * auVar869._16_4_);
            outptr[5] = (float)((uint)bVar17 * auVar734._20_4_ | !bVar17 * auVar869._20_4_);
            outptr[6] = (float)((uint)bVar18 * auVar734._24_4_ | !bVar18 * auVar869._24_4_);
            outptr[7] = (float)((uint)bVar19 * auVar734._28_4_ | !bVar19 * auVar869._28_4_);
            outptr[8] = (float)((uint)bVar20 * auVar734._32_4_ | !bVar20 * auVar869._32_4_);
            outptr[9] = (float)((uint)bVar21 * auVar734._36_4_ | !bVar21 * auVar869._36_4_);
            outptr[10] = (float)((uint)bVar22 * auVar734._40_4_ | !bVar22 * auVar869._40_4_);
            outptr[0xb] = (float)((uint)bVar23 * auVar734._44_4_ | !bVar23 * auVar869._44_4_);
            outptr[0xc] = (float)((uint)bVar24 * auVar734._48_4_ | !bVar24 * auVar869._48_4_);
            outptr[0xd] = (float)((uint)bVar25 * auVar734._52_4_ | !bVar25 * auVar869._52_4_);
            outptr[0xe] = (float)((uint)bVar26 * auVar734._56_4_ | !bVar26 * auVar869._56_4_);
            outptr[0xf] = (float)((uint)bVar27 * auVar734._60_4_ | !bVar27 * auVar869._60_4_);
            ptr1 = (float *)((long)ptr1 + 0x40);
            outptr = outptr + 0x10;
            iVar424 = iVar424 + 0x10;
            auVar734 = in_ZMM22;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        if ((int)(uVar425 | 7) < (int)uVar427) {
          auVar1095._8_4_ = 0x40490fdb;
          auVar1095._0_8_ = 0x40490fdb40490fdb;
          auVar1095._12_4_ = 0x40490fdb;
          auVar1095._16_4_ = 0x40490fdb;
          auVar1095._20_4_ = 0x40490fdb;
          auVar1095._24_4_ = 0x40490fdb;
          auVar1095._28_4_ = 0x40490fdb;
          auVar1338._8_4_ = 0x80000000;
          auVar1338._0_8_ = 0x8000000080000000;
          auVar1338._12_4_ = 0x80000000;
          auVar1338._16_4_ = 0x80000000;
          auVar1338._20_4_ = 0x80000000;
          auVar1338._24_4_ = 0x80000000;
          auVar1338._28_4_ = 0x80000000;
          auVar678 = vpternlogd_avx512vl(auVar1338,auVar674,auVar1095,0xea);
          auVar1154._8_4_ = 0x3f800000;
          auVar1154._0_8_ = 0x3f8000003f800000;
          auVar1154._12_4_ = 0x3f800000;
          auVar1154._16_4_ = 0x3f800000;
          auVar1154._20_4_ = 0x3f800000;
          auVar1154._24_4_ = 0x3f800000;
          auVar1154._28_4_ = 0x3f800000;
          auVar677 = vdivps_avx(auVar1154,auVar674);
          auVar460 = ZEXT816(0) << 0x40;
          uVar46 = vcmpps_avx512vl(ZEXT1632(auVar460),auVar678,2);
          uVar47 = vcmpps_avx512vl(auVar674,ZEXT1632(auVar460),1);
          auVar1339._8_4_ = 0x80000000;
          auVar1339._0_8_ = 0x8000000080000000;
          auVar1339._12_4_ = 0x80000000;
          auVar1339._16_4_ = 0x80000000;
          auVar1339._20_4_ = 0x80000000;
          auVar1339._24_4_ = 0x80000000;
          auVar1339._28_4_ = 0x80000000;
          auVar1394._8_4_ = 0x40490fdb;
          auVar1394._0_8_ = 0x40490fdb40490fdb;
          auVar1394._12_4_ = 0x40490fdb;
          auVar1394._16_4_ = 0x40490fdb;
          auVar1394._20_4_ = 0x40490fdb;
          auVar1394._24_4_ = 0x40490fdb;
          auVar1394._28_4_ = 0x40490fdb;
          auVar1450._8_4_ = 0x7fffffff;
          auVar1450._0_8_ = 0x7fffffff7fffffff;
          auVar1450._12_4_ = 0x7fffffff;
          auVar1450._16_4_ = 0x7fffffff;
          auVar1450._20_4_ = 0x7fffffff;
          auVar1450._24_4_ = 0x7fffffff;
          auVar1450._28_4_ = 0x7fffffff;
          auVar1504._8_4_ = 0xbc83a25c;
          auVar1504._0_8_ = 0xbc83a25cbc83a25c;
          auVar1504._12_4_ = 0xbc83a25c;
          auVar1504._16_4_ = 0xbc83a25c;
          auVar1504._20_4_ = 0xbc83a25c;
          auVar1504._24_4_ = 0xbc83a25c;
          auVar1504._28_4_ = 0xbc83a25c;
          auVar1558._8_4_ = 0xbd99b01e;
          auVar1558._0_8_ = 0xbd99b01ebd99b01e;
          auVar1558._12_4_ = 0xbd99b01e;
          auVar1558._16_4_ = 0xbd99b01e;
          auVar1558._20_4_ = 0xbd99b01e;
          auVar1558._24_4_ = 0xbd99b01e;
          auVar1558._28_4_ = 0xbd99b01e;
          auVar1612._8_4_ = 0xbe117200;
          auVar1612._0_8_ = 0xbe117200be117200;
          auVar1612._12_4_ = 0xbe117200;
          auVar1612._16_4_ = 0xbe117200;
          auVar1612._20_4_ = 0xbe117200;
          auVar1612._24_4_ = 0xbe117200;
          auVar1612._28_4_ = 0xbe117200;
          auVar1666._8_4_ = 0xbeaaaa53;
          auVar1666._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1666._12_4_ = 0xbeaaaa53;
          auVar1666._16_4_ = 0xbeaaaa53;
          auVar1666._20_4_ = 0xbeaaaa53;
          auVar1666._24_4_ = 0xbeaaaa53;
          auVar1666._28_4_ = 0xbeaaaa53;
          auVar1720._8_4_ = 0x3b3ac537;
          auVar1720._0_8_ = 0x3b3ac5373b3ac537;
          auVar1720._12_4_ = 0x3b3ac537;
          auVar1720._16_4_ = 0x3b3ac537;
          auVar1720._20_4_ = 0x3b3ac537;
          auVar1720._24_4_ = 0x3b3ac537;
          auVar1720._28_4_ = 0x3b3ac537;
          auVar1770._8_4_ = 0x3d2edd4e;
          auVar1770._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1770._12_4_ = 0x3d2edd4e;
          auVar1770._16_4_ = 0x3d2edd4e;
          auVar1770._20_4_ = 0x3d2edd4e;
          auVar1770._24_4_ = 0x3d2edd4e;
          auVar1770._28_4_ = 0x3d2edd4e;
          auVar1819._8_4_ = 0x3dd9ed24;
          auVar1819._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1819._12_4_ = 0x3dd9ed24;
          auVar1819._16_4_ = 0x3dd9ed24;
          auVar1819._20_4_ = 0x3dd9ed24;
          auVar1819._24_4_ = 0x3dd9ed24;
          auVar1819._28_4_ = 0x3dd9ed24;
          auVar678 = vbroadcastss_avx512vl(ZEXT416(0x3e4cb974));
          auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          auVar679 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          uVar882 = uVar425;
          do {
            auVar680 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr1;
            auVar683 = vmulps_avx512vl(auVar680,auVar677);
            auVar565 = ZEXT1632(auVar460);
            uVar430 = vcmpps_avx512vl(auVar680,auVar565,1);
            vandps_avx512vl(auVar683,auVar1450);
            auVar170._8_4_ = 0xc0490fdb;
            auVar170._0_8_ = 0xc0490fdbc0490fdb;
            auVar170._12_4_ = 0xc0490fdb;
            auVar170._16_4_ = 0xc0490fdb;
            auVar170._20_4_ = 0xc0490fdb;
            auVar170._24_4_ = 0xc0490fdb;
            auVar170._28_4_ = 0xc0490fdb;
            auVar684 = vblendmps_avx512vl(auVar1394,auVar170);
            bVar12 = (bool)((byte)uVar430 & 1);
            auVar698._0_4_ = (uint)bVar12 * auVar684._0_4_ | (uint)!bVar12 * in_ZMM22._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar698._4_4_ = (uint)bVar12 * auVar684._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar698._8_4_ = (uint)bVar12 * auVar684._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar698._12_4_ = (uint)bVar12 * auVar684._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar698._16_4_ = (uint)bVar12 * auVar684._16_4_ | (uint)!bVar12 * in_ZMM22._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar698._20_4_ = (uint)bVar12 * auVar684._20_4_ | (uint)!bVar12 * in_ZMM22._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar698._24_4_ = (uint)bVar12 * auVar684._24_4_ | (uint)!bVar12 * in_ZMM22._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar698._28_4_ = (uint)bVar12 * auVar684._28_4_ | (uint)!bVar12 * in_ZMM22._28_4_;
            in_ZMM22 = ZEXT3264(auVar698);
            uVar430 = vcmpps_avx512vl(auVar1154,auVar683,1);
            auVar171._8_4_ = 0xbf800000;
            auVar171._0_8_ = 0xbf800000bf800000;
            auVar171._12_4_ = 0xbf800000;
            auVar171._16_4_ = 0xbf800000;
            auVar171._20_4_ = 0xbf800000;
            auVar171._24_4_ = 0xbf800000;
            auVar171._28_4_ = 0xbf800000;
            auVar684 = vblendmps_avx512vl(auVar683,auVar171);
            bVar29 = (byte)uVar430;
            auVar699._0_4_ =
                 (uint)(bVar29 & 1) * auVar684._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM23._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar699._4_4_ = (uint)bVar12 * auVar684._4_4_ | (uint)!bVar12 * in_ZMM23._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar699._8_4_ = (uint)bVar12 * auVar684._8_4_ | (uint)!bVar12 * in_ZMM23._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar699._12_4_ = (uint)bVar12 * auVar684._12_4_ | (uint)!bVar12 * in_ZMM23._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar699._16_4_ = (uint)bVar12 * auVar684._16_4_ | (uint)!bVar12 * in_ZMM23._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar699._20_4_ = (uint)bVar12 * auVar684._20_4_ | (uint)!bVar12 * in_ZMM23._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar699._24_4_ = (uint)bVar12 * auVar684._24_4_ | (uint)!bVar12 * in_ZMM23._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar699._28_4_ = (uint)bVar12 * auVar684._28_4_ | (uint)!bVar12 * in_ZMM23._28_4_;
            auVar684 = vdivps_avx512vl(auVar699,auVar683);
            auVar700._0_4_ =
                 (uint)(bVar29 & 1) * auVar684._0_4_ | !(bool)(bVar29 & 1) * auVar699._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar700._4_4_ = (uint)bVar12 * auVar684._4_4_ | !bVar12 * auVar699._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar700._8_4_ = (uint)bVar12 * auVar684._8_4_ | !bVar12 * auVar699._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar700._12_4_ = (uint)bVar12 * auVar684._12_4_ | !bVar12 * auVar699._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar700._16_4_ = (uint)bVar12 * auVar684._16_4_ | !bVar12 * auVar699._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar700._20_4_ = (uint)bVar12 * auVar684._20_4_ | !bVar12 * auVar699._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar700._24_4_ = (uint)bVar12 * auVar684._24_4_ | !bVar12 * auVar699._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar700._28_4_ = (uint)bVar12 * auVar684._28_4_ | !bVar12 * auVar699._28_4_;
            in_ZMM23 = ZEXT3264(auVar700);
            uVar429 = vcmpps_avx512vl(auVar680,auVar565,4);
            auVar684 = vmulps_avx512vl(auVar700,auVar700);
            vandps_avx512vl(auVar680,auVar1339);
            auVar680 = vmulps_avx512vl(auVar684,auVar684);
            auVar685 = vfmadd213ps_avx512vl(auVar1504,auVar680,auVar1558);
            auVar685 = vfmadd213ps_avx512vl(auVar685,auVar680,auVar1612);
            auVar701 = vfmadd213ps_avx512vl(auVar1720,auVar680,auVar1770);
            auVar701 = vfmadd213ps_avx512vl(auVar701,auVar680,auVar1819);
            auVar685 = vfmadd213ps_avx512vl(auVar685,auVar680,auVar1666);
            auVar701 = vfmadd213ps_avx512vl(auVar701,auVar680,auVar678);
            auVar680 = vfmadd213ps_avx512vl(auVar701,auVar680,auVar1154);
            auVar680 = vfmadd231ps_avx512vl(auVar680,auVar684,auVar685);
            uVar431 = vcmpps_avx512vl(auVar674,auVar565,4);
            uVar431 = uVar429 & uVar431;
            auVar680 = vmulps_avx512vl(auVar680,auVar700);
            auVar685 = vaddps_avx512vl(auVar680,auVar562);
            auVar702._0_4_ =
                 (uint)(bVar29 & 1) * auVar685._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar680._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar702._4_4_ = (uint)bVar12 * auVar685._4_4_ | (uint)!bVar12 * auVar680._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar702._8_4_ = (uint)bVar12 * auVar685._8_4_ | (uint)!bVar12 * auVar680._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar702._12_4_ = (uint)bVar12 * auVar685._12_4_ | (uint)!bVar12 * auVar680._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar702._16_4_ = (uint)bVar12 * auVar685._16_4_ | (uint)!bVar12 * auVar680._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar702._20_4_ = (uint)bVar12 * auVar685._20_4_ | (uint)!bVar12 * auVar680._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar702._24_4_ = (uint)bVar12 * auVar685._24_4_ | (uint)!bVar12 * auVar680._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar702._28_4_ = (uint)bVar12 * auVar685._28_4_ | (uint)!bVar12 * auVar680._28_4_;
            auVar680 = vpternlogd_avx512vl(auVar702,auVar683,auVar1339,0xf8);
            auVar683 = vaddps_avx512vl(auVar680,auVar698);
            bVar12 = (bool)((byte)uVar47 & 1);
            uVar425 = (uint)bVar12 * auVar683._0_4_ | (uint)!bVar12 * auVar680._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            uVar883 = (uint)bVar12 * auVar683._4_4_ | (uint)!bVar12 * auVar680._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            uVar884 = (uint)bVar12 * auVar683._8_4_ | (uint)!bVar12 * auVar680._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            uVar885 = (uint)bVar12 * auVar683._12_4_ | (uint)!bVar12 * auVar680._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            uVar886 = (uint)bVar12 * auVar683._16_4_ | (uint)!bVar12 * auVar680._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            uVar887 = (uint)bVar12 * auVar683._20_4_ | (uint)!bVar12 * auVar680._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            uVar888 = (uint)bVar12 * auVar683._24_4_ | (uint)!bVar12 * auVar680._24_4_;
            bVar12 = SUB81(uVar47 >> 7,0);
            uVar889 = (uint)bVar12 * auVar683._28_4_ | (uint)!bVar12 * auVar680._28_4_;
            in_ZMM21 = ZEXT3264(CONCAT428(uVar889,CONCAT424(uVar888,CONCAT420(uVar887,CONCAT416(
                                                  uVar886,CONCAT412(uVar885,CONCAT48(uVar884,
                                                  CONCAT44(uVar883,uVar425))))))));
            auVar680 = vorps_avx512vl(auVar684,auVar679);
            auVar703._4_4_ = (uint)((byte)(uVar429 >> 1) & 1) * auVar680._4_4_;
            auVar703._0_4_ = (uint)((byte)uVar429 & 1) * auVar680._0_4_;
            auVar703._8_4_ = (uint)((byte)(uVar429 >> 2) & 1) * auVar680._8_4_;
            auVar703._12_4_ = (uint)((byte)(uVar429 >> 3) & 1) * auVar680._12_4_;
            auVar703._16_4_ = (uint)((byte)(uVar429 >> 4) & 1) * auVar680._16_4_;
            auVar703._20_4_ = (uint)((byte)(uVar429 >> 5) & 1) * auVar680._20_4_;
            auVar703._24_4_ = (uint)((byte)(uVar429 >> 6) & 1) * auVar680._24_4_;
            auVar703._28_4_ = (uint)(byte)(uVar429 >> 7) * auVar680._28_4_;
            bVar29 = (byte)uVar429 | (byte)uVar46;
            auVar680 = vorps_avx512vl(auVar703,auVar1095);
            auVar683 = vmovdqa32_avx512vl(auVar703);
            bVar13 = (bool)(bVar29 >> 1 & 1);
            bVar15 = (bool)(bVar29 >> 2 & 1);
            bVar17 = (bool)(bVar29 >> 3 & 1);
            bVar19 = (bool)(bVar29 >> 4 & 1);
            bVar21 = (bool)(bVar29 >> 5 & 1);
            bVar23 = (bool)(bVar29 >> 6 & 1);
            bVar12 = (bool)((byte)uVar431 & 1);
            bVar14 = (bool)((byte)(uVar431 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar431 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar431 >> 3) & 1);
            bVar20 = (bool)((byte)(uVar431 >> 4) & 1);
            bVar22 = (bool)((byte)(uVar431 >> 5) & 1);
            bVar24 = (bool)((byte)(uVar431 >> 6) & 1);
            bVar25 = SUB81(uVar431 >> 7,0);
            *outptr = (float)(bVar12 * uVar425 |
                             (uint)!bVar12 *
                             ((uint)(bVar29 & 1) * auVar683._0_4_ |
                             (uint)!(bool)(bVar29 & 1) * auVar680._0_4_));
            outptr[1] = (float)(bVar14 * uVar883 |
                               (uint)!bVar14 *
                               ((uint)bVar13 * auVar683._4_4_ | (uint)!bVar13 * auVar680._4_4_));
            outptr[2] = (float)(bVar16 * uVar884 |
                               (uint)!bVar16 *
                               ((uint)bVar15 * auVar683._8_4_ | (uint)!bVar15 * auVar680._8_4_));
            outptr[3] = (float)(bVar18 * uVar885 |
                               (uint)!bVar18 *
                               ((uint)bVar17 * auVar683._12_4_ | (uint)!bVar17 * auVar680._12_4_));
            outptr[4] = (float)(bVar20 * uVar886 |
                               (uint)!bVar20 *
                               ((uint)bVar19 * auVar683._16_4_ | (uint)!bVar19 * auVar680._16_4_));
            outptr[5] = (float)(bVar22 * uVar887 |
                               (uint)!bVar22 *
                               ((uint)bVar21 * auVar683._20_4_ | (uint)!bVar21 * auVar680._20_4_));
            outptr[6] = (float)(bVar24 * uVar888 |
                               (uint)!bVar24 *
                               ((uint)bVar23 * auVar683._24_4_ | (uint)!bVar23 * auVar680._24_4_));
            outptr[7] = (float)(bVar25 * uVar889 |
                               (uint)!bVar25 *
                               ((uint)(bVar29 >> 7) * auVar683._28_4_ |
                               (uint)!(bool)(bVar29 >> 7) * auVar680._28_4_));
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
            outptr = outptr + 8;
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)(uVar425 | 3) < (int)uVar427) {
          auVar962._8_4_ = 0x40490fdb;
          auVar962._0_8_ = 0x40490fdb40490fdb;
          auVar962._12_4_ = 0x40490fdb;
          auVar1233._8_4_ = 0x80000000;
          auVar1233._0_8_ = 0x8000000080000000;
          auVar1233._12_4_ = 0x80000000;
          auVar461 = vpternlogd_avx512vl(auVar1233,auVar906,auVar962,0xea);
          auVar1047._8_4_ = 0x3f800000;
          auVar1047._0_8_ = 0x3f8000003f800000;
          auVar1047._12_4_ = 0x3f800000;
          auVar460 = vdivps_avx(auVar1047,auVar906);
          auVar472 = ZEXT816(0) << 0x40;
          uVar46 = vcmpps_avx512vl(auVar472,auVar461,2);
          uVar47 = vcmpps_avx512vl(auVar906,auVar472,1);
          auVar1234._8_4_ = 0x80000000;
          auVar1234._0_8_ = 0x8000000080000000;
          auVar1234._12_4_ = 0x80000000;
          auVar1298._8_4_ = 0x40490fdb;
          auVar1298._0_8_ = 0x40490fdb40490fdb;
          auVar1298._12_4_ = 0x40490fdb;
          auVar1359._8_4_ = 0x7fffffff;
          auVar1359._0_8_ = 0x7fffffff7fffffff;
          auVar1359._12_4_ = 0x7fffffff;
          auVar1415._8_4_ = 0xbc83a25c;
          auVar1415._0_8_ = 0xbc83a25cbc83a25c;
          auVar1415._12_4_ = 0xbc83a25c;
          auVar1469._8_4_ = 0xbd99b01e;
          auVar1469._0_8_ = 0xbd99b01ebd99b01e;
          auVar1469._12_4_ = 0xbd99b01e;
          auVar1523._8_4_ = 0xbe117200;
          auVar1523._0_8_ = 0xbe117200be117200;
          auVar1523._12_4_ = 0xbe117200;
          auVar1577._8_4_ = 0xbeaaaa53;
          auVar1577._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1577._12_4_ = 0xbeaaaa53;
          auVar1631._8_4_ = 0x3b3ac537;
          auVar1631._0_8_ = 0x3b3ac5373b3ac537;
          auVar1631._12_4_ = 0x3b3ac537;
          auVar1685._8_4_ = 0x3d2edd4e;
          auVar1685._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1685._12_4_ = 0x3d2edd4e;
          auVar1739._8_4_ = 0x3dd9ed24;
          auVar1739._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1739._12_4_ = 0x3dd9ed24;
          auVar1790._8_4_ = 0x3e4cb974;
          auVar1790._0_8_ = 0x3e4cb9743e4cb974;
          auVar1790._12_4_ = 0x3e4cb974;
          auVar461 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          auVar519 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          uVar882 = uVar425;
          do {
            auVar464 = *(undefined1 (*) [16])*(undefined1 (*) [64])ptr1;
            auVar465 = vmulps_avx512vl(auVar464,auVar460);
            uVar430 = vcmpps_avx512vl(auVar464,auVar472,1);
            auVar466 = vandps_avx512vl(auVar465,auVar1359);
            auVar50._8_4_ = 0xc0490fdb;
            auVar50._0_8_ = 0xc0490fdbc0490fdb;
            auVar50._12_4_ = 0xc0490fdb;
            auVar469 = vblendmps_avx512vl(auVar1298,auVar50);
            bVar12 = (bool)((byte)uVar430 & 1);
            auVar520._0_4_ = (uint)bVar12 * auVar469._0_4_ | (uint)!bVar12 * in_ZMM21._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar520._4_4_ = (uint)bVar12 * auVar469._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar520._8_4_ = (uint)bVar12 * auVar469._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar520._12_4_ = (uint)bVar12 * auVar469._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
            in_ZMM21 = ZEXT1664(auVar520);
            uVar430 = vcmpps_avx512vl(auVar1047,auVar466,1);
            auVar51._8_4_ = 0xbf800000;
            auVar51._0_8_ = 0xbf800000bf800000;
            auVar51._12_4_ = 0xbf800000;
            auVar469 = vblendmps_avx512vl(auVar466,auVar51);
            bVar29 = (byte)uVar430;
            auVar521._0_4_ =
                 (uint)(bVar29 & 1) * auVar469._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM22._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar521._4_4_ = (uint)bVar12 * auVar469._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar521._8_4_ = (uint)bVar12 * auVar469._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar521._12_4_ = (uint)bVar12 * auVar469._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
            uVar429 = vcmpps_avx512vl(auVar464,auVar472,4);
            auVar466 = vdivps_avx512vl(auVar521,auVar466);
            auVar522._0_4_ =
                 (uint)(bVar29 & 1) * auVar466._0_4_ | !(bool)(bVar29 & 1) * auVar521._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar522._4_4_ = (uint)bVar12 * auVar466._4_4_ | !bVar12 * auVar521._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar522._8_4_ = (uint)bVar12 * auVar466._8_4_ | !bVar12 * auVar521._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar522._12_4_ = (uint)bVar12 * auVar466._12_4_ | !bVar12 * auVar521._12_4_;
            in_ZMM22 = ZEXT1664(auVar522);
            auVar466 = vmulps_avx512vl(auVar522,auVar522);
            auVar464 = vandps_avx512vl(auVar464,auVar1234);
            auVar469 = vmulps_avx512vl(auVar466,auVar466);
            auVar470 = vfmadd213ps_avx512vl(auVar1415,auVar469,auVar1469);
            auVar470 = vfmadd213ps_avx512vl(auVar470,auVar469,auVar1523);
            auVar523 = vfmadd213ps_avx512vl(auVar1631,auVar469,auVar1685);
            auVar523 = vfmadd213ps_avx512vl(auVar523,auVar469,auVar1739);
            auVar470 = vfmadd213ps_avx512vl(auVar470,auVar469,auVar1577);
            auVar523 = vfmadd213ps_avx512vl(auVar523,auVar469,auVar1790);
            auVar469 = vfmadd213ps_avx512vl(auVar523,auVar469,auVar1047);
            auVar466 = vfmadd231ps_avx512vl(auVar469,auVar466,auVar470);
            uVar431 = vcmpps_avx512vl(auVar906,auVar472,4);
            uVar431 = uVar429 & uVar431;
            auVar466 = vmulps_avx512vl(auVar466,auVar522);
            auVar469 = vaddps_avx512vl(auVar466,auVar461);
            auVar524._0_4_ =
                 (uint)(bVar29 & 1) * auVar469._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar466._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar524._4_4_ = (uint)bVar12 * auVar469._4_4_ | (uint)!bVar12 * auVar466._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar524._8_4_ = (uint)bVar12 * auVar469._8_4_ | (uint)!bVar12 * auVar466._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar524._12_4_ = (uint)bVar12 * auVar469._12_4_ | (uint)!bVar12 * auVar466._12_4_;
            auVar465 = vpternlogd_avx512vl(auVar524,auVar465,auVar1234,0xf8);
            auVar466 = vaddps_avx512vl(auVar465,auVar520);
            bVar12 = (bool)((byte)uVar47 & 1);
            bVar15 = (bool)((byte)(uVar47 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar47 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar464 = vorps_avx512vl(auVar464,auVar519);
            auVar525._4_4_ = (uint)((byte)(uVar429 >> 1) & 1) * auVar464._4_4_;
            auVar525._0_4_ = (uint)((byte)uVar429 & 1) * auVar464._0_4_;
            auVar525._8_4_ = (uint)((byte)(uVar429 >> 2) & 1) * auVar464._8_4_;
            auVar525._12_4_ = (uint)((byte)(uVar429 >> 3) & 1) * auVar464._12_4_;
            uVar48 = (ushort)uVar429 | (ushort)uVar46;
            auVar464 = vorps_avx512vl(auVar525,auVar962);
            auVar469 = vmovdqa32_avx512vl(auVar525);
            bVar13 = (bool)((byte)uVar48 & 1);
            bVar16 = (bool)((byte)(uVar48 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar48 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar48 >> 3) & 1);
            bVar14 = (bool)((byte)uVar431 & 1);
            bVar17 = (bool)((byte)(uVar431 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar431 >> 2) & 1);
            bVar23 = (bool)((byte)(uVar431 >> 3) & 1);
            *outptr = (float)((uint)bVar14 *
                              ((uint)bVar12 * auVar466._0_4_ | (uint)!bVar12 * auVar465._0_4_) |
                             (uint)!bVar14 *
                             ((uint)bVar13 * auVar469._0_4_ | (uint)!bVar13 * auVar464._0_4_));
            outptr[1] = (float)((uint)bVar17 *
                                ((uint)bVar15 * auVar466._4_4_ | (uint)!bVar15 * auVar465._4_4_) |
                               (uint)!bVar17 *
                               ((uint)bVar16 * auVar469._4_4_ | (uint)!bVar16 * auVar464._4_4_));
            outptr[2] = (float)((uint)bVar20 *
                                ((uint)bVar18 * auVar466._8_4_ | (uint)!bVar18 * auVar465._8_4_) |
                               (uint)!bVar20 *
                               ((uint)bVar19 * auVar469._8_4_ | (uint)!bVar19 * auVar464._8_4_));
            outptr[3] = (float)((uint)bVar23 *
                                ((uint)bVar21 * auVar466._12_4_ | (uint)!bVar21 * auVar465._12_4_) |
                               (uint)!bVar23 *
                               ((uint)bVar22 * auVar469._12_4_ | (uint)!bVar22 * auVar464._12_4_));
            ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
            outptr = outptr + 4;
            uVar425 = uVar882 + 4;
            iVar424 = uVar882 + 7;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        auVar442 = vmovdqa64_avx512vl(auVar442);
        if (uVar427 - uVar425 == 0 || (int)uVar427 < (int)uVar425) {
          return;
        }
        lVar428 = 0;
        do {
          local_98 = auVar442._0_4_;
          fVar890 = atan2f(*(float *)(*(undefined1 (*) [64])ptr1 + lVar428 * 4),local_98);
          outptr[lVar428] = fVar890;
          lVar428 = lVar428 + 1;
        } while (uVar427 - uVar425 != (int)lVar428);
        return;
      }
    }
    if (bp == 1) {
      if (aw == bw) {
        if (0 < (int)uVar425 && iVar424 == 0x10) {
          auVar1774 = ZEXT864(0);
          auVar716 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar718 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar725 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar726 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar727 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar728 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          auVar729 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar730 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar734 = in_ZMM20;
          uVar427 = uVar425;
          do {
            auVar852 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
            auVar737 = *(undefined1 (*) [64])ptr;
            in_ZMM18 = vdivps_avx512f(auVar852,auVar737);
            uVar47 = vcmpps_avx512f(auVar852,auVar1774,1);
            auVar733 = vandps_avx512dq(in_ZMM18,auVar718);
            auVar326._8_4_ = 0xc0490fdb;
            auVar326._0_8_ = 0xc0490fdbc0490fdb;
            auVar326._12_4_ = 0xc0490fdb;
            auVar326._16_4_ = 0xc0490fdb;
            auVar326._20_4_ = 0xc0490fdb;
            auVar326._24_4_ = 0xc0490fdb;
            auVar326._28_4_ = 0xc0490fdb;
            auVar326._32_4_ = 0xc0490fdb;
            auVar326._36_4_ = 0xc0490fdb;
            auVar326._40_4_ = 0xc0490fdb;
            auVar326._44_4_ = 0xc0490fdb;
            auVar326._48_4_ = 0xc0490fdb;
            auVar326._52_4_ = 0xc0490fdb;
            auVar326._56_4_ = 0xc0490fdb;
            auVar326._60_4_ = 0xc0490fdb;
            auVar736 = vblendmps_avx512f(auVar717,auVar326);
            bVar12 = (bool)((byte)uVar47 & 1);
            in_ZMM20._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            in_ZMM20._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            in_ZMM20._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            in_ZMM20._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            in_ZMM20._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            in_ZMM20._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            in_ZMM20._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            in_ZMM20._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            in_ZMM20._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            in_ZMM20._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            in_ZMM20._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            in_ZMM20._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            in_ZMM20._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            in_ZMM20._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            in_ZMM20._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            in_ZMM20._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            uVar47 = vcmpps_avx512f(auVar719,auVar733,1);
            auVar327._8_4_ = 0xbf800000;
            auVar327._0_8_ = 0xbf800000bf800000;
            auVar327._12_4_ = 0xbf800000;
            auVar327._16_4_ = 0xbf800000;
            auVar327._20_4_ = 0xbf800000;
            auVar327._24_4_ = 0xbf800000;
            auVar327._28_4_ = 0xbf800000;
            auVar327._32_4_ = 0xbf800000;
            auVar327._36_4_ = 0xbf800000;
            auVar327._40_4_ = 0xbf800000;
            auVar327._44_4_ = 0xbf800000;
            auVar327._48_4_ = 0xbf800000;
            auVar327._52_4_ = 0xbf800000;
            auVar327._56_4_ = 0xbf800000;
            auVar327._60_4_ = 0xbf800000;
            auVar734 = vblendmps_avx512f(auVar733,auVar327);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar749._0_4_ = (uint)bVar12 * auVar734._0_4_ | (uint)!bVar12 * in_ZMM21._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar749._4_4_ = (uint)bVar12 * auVar734._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar749._8_4_ = (uint)bVar12 * auVar734._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar749._12_4_ = (uint)bVar12 * auVar734._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar749._16_4_ = (uint)bVar12 * auVar734._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar749._20_4_ = (uint)bVar12 * auVar734._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar749._24_4_ = (uint)bVar12 * auVar734._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar749._28_4_ = (uint)bVar12 * auVar734._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
            bVar29 = (byte)(uVar47 >> 8);
            bVar12 = (bool)(bVar29 & 1);
            auVar749._32_4_ = (uint)bVar12 * auVar734._32_4_ | (uint)!bVar12 * in_ZMM21._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar749._36_4_ = (uint)bVar12 * auVar734._36_4_ | (uint)!bVar12 * in_ZMM21._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar749._40_4_ = (uint)bVar12 * auVar734._40_4_ | (uint)!bVar12 * in_ZMM21._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar749._44_4_ = (uint)bVar12 * auVar734._44_4_ | (uint)!bVar12 * in_ZMM21._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar749._48_4_ = (uint)bVar12 * auVar734._48_4_ | (uint)!bVar12 * in_ZMM21._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar749._52_4_ = (uint)bVar12 * auVar734._52_4_ | (uint)!bVar12 * in_ZMM21._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar749._56_4_ = (uint)bVar12 * auVar734._56_4_ | (uint)!bVar12 * in_ZMM21._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar749._60_4_ = (uint)bVar12 * auVar734._60_4_ | (uint)!bVar12 * in_ZMM21._60_4_;
            auVar734 = vmaxps_avx512f(auVar733,auVar719);
            uVar430 = vcmpps_avx512f(auVar737,auVar1774,4);
            auVar734 = vdivps_avx512f(auVar749,auVar734);
            uVar429 = vcmpps_avx512f(auVar737,auVar1774,1);
            in_ZMM21 = vmulps_avx512f(auVar734,auVar734);
            auVar733 = vmulps_avx512f(in_ZMM21,in_ZMM21);
            auVar736 = vfmadd213ps_avx512f(auVar720,auVar733,auVar721);
            auVar736 = vfmadd213ps_avx512f(auVar736,auVar733,auVar722);
            auVar731 = vfmadd213ps_avx512f(auVar724,auVar733,auVar725);
            auVar736 = vfmadd213ps_avx512f(auVar736,auVar733,auVar723);
            auVar731 = vfmadd213ps_avx512f(auVar731,auVar733,auVar726);
            auVar731 = vfmadd213ps_avx512f(auVar731,auVar733,auVar727);
            auVar733 = vfmadd213ps_avx512f(auVar731,auVar733,auVar719);
            uVar431 = vcmpps_avx512f(auVar852,auVar1774,4);
            auVar733 = vfmadd231ps_avx512f(auVar733,in_ZMM21,auVar736);
            auVar734 = vmulps_avx512f(auVar733,auVar734);
            auVar733 = vaddps_avx512f(auVar734,auVar728);
            bVar12 = (bool)((byte)uVar47 & 1);
            auVar750._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar750._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar750._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar750._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar750._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar750._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar750._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar750._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)(bVar29 & 1);
            auVar750._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar750._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar750._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar750._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar750._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar750._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar750._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar750._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            auVar734 = vpternlogd_avx512f(auVar750,in_ZMM18,auVar716,0xf8);
            auVar733 = vaddps_avx512f(auVar734,in_ZMM20);
            bVar12 = (bool)((byte)uVar429 & 1);
            in_ZMM19._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar734._0_4_;
            bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
            in_ZMM19._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar734._4_4_;
            bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
            in_ZMM19._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar734._8_4_;
            bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
            in_ZMM19._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar734._12_4_;
            bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
            in_ZMM19._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar734._16_4_;
            bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
            in_ZMM19._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar734._20_4_;
            bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
            in_ZMM19._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar734._24_4_;
            bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
            in_ZMM19._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar734._28_4_;
            bVar12 = (bool)((byte)(uVar429 >> 8) & 1);
            in_ZMM19._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar734._32_4_;
            bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
            in_ZMM19._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar734._36_4_;
            bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
            in_ZMM19._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar734._40_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
            in_ZMM19._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar734._44_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
            in_ZMM19._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar734._48_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
            in_ZMM19._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar734._52_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
            in_ZMM19._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar734._56_4_;
            bVar12 = SUB81(uVar429 >> 0xf,0);
            in_ZMM19._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar734._60_4_;
            auVar734 = vpternlogd_avx512f(auVar737,auVar716,auVar729,0xea);
            uVar47 = vcmpps_avx512f(auVar734,auVar1774,1);
            auVar734 = vpternlogd_avx512f(auVar852,auVar716,auVar730,0xea);
            bVar12 = (bool)((byte)uVar430 & 1);
            bVar14 = (bool)((byte)(uVar430 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar430 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar430 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar430 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar430 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar430 >> 6) & 1);
            bVar20 = (bool)((byte)(uVar430 >> 7) & 1);
            bVar21 = (bool)((byte)(uVar430 >> 8) & 1);
            bVar22 = (bool)((byte)(uVar430 >> 9) & 1);
            bVar23 = (bool)((byte)(uVar430 >> 10) & 1);
            bVar24 = (bool)((byte)(uVar430 >> 0xb) & 1);
            bVar25 = (bool)((byte)(uVar430 >> 0xc) & 1);
            bVar26 = (bool)((byte)(uVar430 >> 0xd) & 1);
            bVar27 = (bool)((byte)(uVar430 >> 0xe) & 1);
            bVar28 = SUB81(uVar430 >> 0xf,0);
            bVar13 = (bool)((byte)uVar431 & 1);
            auVar751._0_4_ =
                 (uint)bVar13 * (bVar12 * in_ZMM19._0_4_ | (uint)!bVar12 * auVar734._0_4_) |
                 (uint)!bVar13 * (uint)((byte)uVar47 & 1) * auVar717._0_4_;
            bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
            auVar751._4_4_ =
                 (uint)bVar12 * (bVar14 * in_ZMM19._4_4_ | (uint)!bVar14 * auVar734._4_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 1) & 1) * auVar717._4_4_;
            bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
            auVar751._8_4_ =
                 (uint)bVar12 * (bVar15 * in_ZMM19._8_4_ | (uint)!bVar15 * auVar734._8_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 2) & 1) * auVar717._8_4_;
            bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
            auVar751._12_4_ =
                 (uint)bVar12 * (bVar16 * in_ZMM19._12_4_ | (uint)!bVar16 * auVar734._12_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 3) & 1) * auVar717._12_4_;
            bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
            auVar751._16_4_ =
                 (uint)bVar12 * (bVar17 * in_ZMM19._16_4_ | (uint)!bVar17 * auVar734._16_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 4) & 1) * auVar717._16_4_;
            bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
            auVar751._20_4_ =
                 (uint)bVar12 * (bVar18 * in_ZMM19._20_4_ | (uint)!bVar18 * auVar734._20_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 5) & 1) * auVar717._20_4_;
            bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
            auVar751._24_4_ =
                 (uint)bVar12 * (bVar19 * in_ZMM19._24_4_ | (uint)!bVar19 * auVar734._24_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 6) & 1) * auVar717._24_4_;
            bVar12 = (bool)((byte)(uVar431 >> 7) & 1);
            auVar751._28_4_ =
                 (uint)bVar12 * (bVar20 * in_ZMM19._28_4_ | (uint)!bVar20 * auVar734._28_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 7) & 1) * auVar717._28_4_;
            bVar12 = (bool)((byte)(uVar431 >> 8) & 1);
            auVar751._32_4_ =
                 (uint)bVar12 * (bVar21 * in_ZMM19._32_4_ | (uint)!bVar21 * auVar734._32_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 8) & 1) * auVar717._32_4_;
            bVar12 = (bool)((byte)(uVar431 >> 9) & 1);
            auVar751._36_4_ =
                 (uint)bVar12 * (bVar22 * in_ZMM19._36_4_ | (uint)!bVar22 * auVar734._36_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 9) & 1) * auVar717._36_4_;
            bVar12 = (bool)((byte)(uVar431 >> 10) & 1);
            auVar751._40_4_ =
                 (uint)bVar12 * (bVar23 * in_ZMM19._40_4_ | (uint)!bVar23 * auVar734._40_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 10) & 1) * auVar717._40_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xb) & 1);
            auVar751._44_4_ =
                 (uint)bVar12 * (bVar24 * in_ZMM19._44_4_ | (uint)!bVar24 * auVar734._44_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xb) & 1) * auVar717._44_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xc) & 1);
            auVar751._48_4_ =
                 (uint)bVar12 * (bVar25 * in_ZMM19._48_4_ | (uint)!bVar25 * auVar734._48_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xc) & 1) * auVar717._48_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xd) & 1);
            auVar751._52_4_ =
                 (uint)bVar12 * (bVar26 * in_ZMM19._52_4_ | (uint)!bVar26 * auVar734._52_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xd) & 1) * auVar717._52_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xe) & 1);
            auVar751._56_4_ =
                 (uint)bVar12 * (bVar27 * in_ZMM19._56_4_ | (uint)!bVar27 * auVar734._56_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xe) & 1) * auVar717._56_4_;
            bVar12 = SUB81(uVar431 >> 0xf,0);
            auVar751._60_4_ =
                 (uint)bVar12 * (bVar28 * in_ZMM19._60_4_ | (uint)!bVar28 * auVar734._60_4_) |
                 (uint)!bVar12 * (uint)(byte)(uVar47 >> 0xf) * auVar717._60_4_;
            *(undefined1 (*) [64])outptr = auVar751;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
            uVar427 = uVar427 - 1;
            auVar734 = in_ZMM20;
          } while (uVar427 != 0);
        }
        if (iVar424 == 8) {
          uVar427 = 0;
          if (1 < (int)uVar425) {
            iVar426 = 1;
            auVar1774 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar716 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar717 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar718 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            auVar719 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar720 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
            auVar721 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
            auVar722 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
            auVar723 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
            auVar724 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
            auVar725 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
            auVar726 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
            auVar727 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
            auVar728 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar729 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
            auVar730 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
            auVar734 = in_ZMM20;
            do {
              auVar674 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
              auVar737 = *(undefined1 (*) [64])ptr;
              auVar677 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
              auVar852 = vinsertf64x4_avx512f(ZEXT3264(auVar674),auVar677,1);
              in_ZMM18 = vdivps_avx512f(auVar852,auVar737);
              uVar47 = vcmpps_avx512f(auVar852,auVar1774,1);
              auVar733 = vandps_avx512dq(in_ZMM18,auVar718);
              auVar328._8_4_ = 0xc0490fdb;
              auVar328._0_8_ = 0xc0490fdbc0490fdb;
              auVar328._12_4_ = 0xc0490fdb;
              auVar328._16_4_ = 0xc0490fdb;
              auVar328._20_4_ = 0xc0490fdb;
              auVar328._24_4_ = 0xc0490fdb;
              auVar328._28_4_ = 0xc0490fdb;
              auVar328._32_4_ = 0xc0490fdb;
              auVar328._36_4_ = 0xc0490fdb;
              auVar328._40_4_ = 0xc0490fdb;
              auVar328._44_4_ = 0xc0490fdb;
              auVar328._48_4_ = 0xc0490fdb;
              auVar328._52_4_ = 0xc0490fdb;
              auVar328._56_4_ = 0xc0490fdb;
              auVar328._60_4_ = 0xc0490fdb;
              auVar736 = vblendmps_avx512f(auVar717,auVar328);
              bVar12 = (bool)((byte)uVar47 & 1);
              in_ZMM20._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * auVar734._0_4_;
              bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
              in_ZMM20._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * auVar734._4_4_;
              bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
              in_ZMM20._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * auVar734._8_4_;
              bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
              in_ZMM20._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * auVar734._12_4_;
              bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
              in_ZMM20._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * auVar734._16_4_;
              bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
              in_ZMM20._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * auVar734._20_4_;
              bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
              in_ZMM20._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * auVar734._24_4_;
              bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
              in_ZMM20._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * auVar734._28_4_;
              bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
              in_ZMM20._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * auVar734._32_4_;
              bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
              in_ZMM20._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * auVar734._36_4_;
              bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
              in_ZMM20._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * auVar734._40_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
              in_ZMM20._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * auVar734._44_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
              in_ZMM20._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * auVar734._48_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
              in_ZMM20._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * auVar734._52_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
              in_ZMM20._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * auVar734._56_4_;
              bVar12 = SUB81(uVar47 >> 0xf,0);
              in_ZMM20._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * auVar734._60_4_;
              uVar47 = vcmpps_avx512f(auVar719,auVar733,1);
              auVar329._8_4_ = 0xbf800000;
              auVar329._0_8_ = 0xbf800000bf800000;
              auVar329._12_4_ = 0xbf800000;
              auVar329._16_4_ = 0xbf800000;
              auVar329._20_4_ = 0xbf800000;
              auVar329._24_4_ = 0xbf800000;
              auVar329._28_4_ = 0xbf800000;
              auVar329._32_4_ = 0xbf800000;
              auVar329._36_4_ = 0xbf800000;
              auVar329._40_4_ = 0xbf800000;
              auVar329._44_4_ = 0xbf800000;
              auVar329._48_4_ = 0xbf800000;
              auVar329._52_4_ = 0xbf800000;
              auVar329._56_4_ = 0xbf800000;
              auVar329._60_4_ = 0xbf800000;
              auVar734 = vblendmps_avx512f(auVar733,auVar329);
              bVar12 = (bool)((byte)uVar47 & 1);
              auVar752._0_4_ = (uint)bVar12 * auVar734._0_4_ | (uint)!bVar12 * in_ZMM21._0_4_;
              bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
              auVar752._4_4_ = (uint)bVar12 * auVar734._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
              bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
              auVar752._8_4_ = (uint)bVar12 * auVar734._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
              bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
              auVar752._12_4_ = (uint)bVar12 * auVar734._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
              bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
              auVar752._16_4_ = (uint)bVar12 * auVar734._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
              bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
              auVar752._20_4_ = (uint)bVar12 * auVar734._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
              bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
              auVar752._24_4_ = (uint)bVar12 * auVar734._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
              bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
              auVar752._28_4_ = (uint)bVar12 * auVar734._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
              bVar29 = (byte)(uVar47 >> 8);
              bVar12 = (bool)(bVar29 & 1);
              auVar752._32_4_ = (uint)bVar12 * auVar734._32_4_ | (uint)!bVar12 * in_ZMM21._32_4_;
              bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
              auVar752._36_4_ = (uint)bVar12 * auVar734._36_4_ | (uint)!bVar12 * in_ZMM21._36_4_;
              bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
              auVar752._40_4_ = (uint)bVar12 * auVar734._40_4_ | (uint)!bVar12 * in_ZMM21._40_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
              auVar752._44_4_ = (uint)bVar12 * auVar734._44_4_ | (uint)!bVar12 * in_ZMM21._44_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
              auVar752._48_4_ = (uint)bVar12 * auVar734._48_4_ | (uint)!bVar12 * in_ZMM21._48_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
              auVar752._52_4_ = (uint)bVar12 * auVar734._52_4_ | (uint)!bVar12 * in_ZMM21._52_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
              auVar752._56_4_ = (uint)bVar12 * auVar734._56_4_ | (uint)!bVar12 * in_ZMM21._56_4_;
              bVar12 = SUB81(uVar47 >> 0xf,0);
              auVar752._60_4_ = (uint)bVar12 * auVar734._60_4_ | (uint)!bVar12 * in_ZMM21._60_4_;
              auVar734 = vmaxps_avx512f(auVar733,auVar719);
              auVar734 = vdivps_avx512f(auVar752,auVar734);
              uVar430 = vcmpps_avx512f(auVar737,auVar1774,4);
              in_ZMM21 = vmulps_avx512f(auVar734,auVar734);
              uVar429 = vcmpps_avx512f(auVar737,auVar1774,1);
              auVar733 = vmulps_avx512f(in_ZMM21,in_ZMM21);
              auVar736 = vfmadd213ps_avx512f(auVar720,auVar733,auVar721);
              auVar736 = vfmadd213ps_avx512f(auVar736,auVar733,auVar722);
              auVar731 = vfmadd213ps_avx512f(auVar724,auVar733,auVar725);
              auVar731 = vfmadd213ps_avx512f(auVar731,auVar733,auVar726);
              auVar736 = vfmadd213ps_avx512f(auVar736,auVar733,auVar723);
              auVar731 = vfmadd213ps_avx512f(auVar731,auVar733,auVar727);
              auVar733 = vfmadd213ps_avx512f(auVar731,auVar733,auVar719);
              auVar733 = vfmadd231ps_avx512f(auVar733,in_ZMM21,auVar736);
              uVar431 = vcmpps_avx512f(auVar852,auVar1774,4);
              auVar734 = vmulps_avx512f(auVar733,auVar734);
              auVar733 = vaddps_avx512f(auVar734,auVar728);
              bVar12 = (bool)((byte)uVar47 & 1);
              auVar753._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar734._0_4_;
              bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
              auVar753._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar734._4_4_;
              bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
              auVar753._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar734._8_4_;
              bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
              auVar753._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar734._12_4_;
              bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
              auVar753._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar734._16_4_;
              bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
              auVar753._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar734._20_4_;
              bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
              auVar753._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar734._24_4_;
              bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
              auVar753._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar734._28_4_;
              bVar12 = (bool)(bVar29 & 1);
              auVar753._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar734._32_4_;
              bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
              auVar753._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar734._36_4_;
              bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
              auVar753._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar734._40_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
              auVar753._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar734._44_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
              auVar753._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar734._48_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
              auVar753._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar734._52_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
              auVar753._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar734._56_4_;
              bVar12 = SUB81(uVar47 >> 0xf,0);
              auVar753._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar734._60_4_;
              auVar734 = vpternlogd_avx512f(auVar753,in_ZMM18,auVar716,0xf8);
              auVar733 = vaddps_avx512f(auVar734,in_ZMM20);
              bVar12 = (bool)((byte)uVar429 & 1);
              in_ZMM19._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar734._0_4_;
              bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
              in_ZMM19._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar734._4_4_;
              bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
              in_ZMM19._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar734._8_4_;
              bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
              in_ZMM19._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar734._12_4_;
              bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
              in_ZMM19._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar734._16_4_;
              bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
              in_ZMM19._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar734._20_4_;
              bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
              in_ZMM19._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar734._24_4_;
              bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
              in_ZMM19._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar734._28_4_;
              bVar12 = (bool)((byte)(uVar429 >> 8) & 1);
              in_ZMM19._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar734._32_4_;
              bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
              in_ZMM19._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar734._36_4_;
              bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
              in_ZMM19._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar734._40_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
              in_ZMM19._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar734._44_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
              in_ZMM19._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar734._48_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
              in_ZMM19._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar734._52_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
              in_ZMM19._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar734._56_4_;
              bVar12 = SUB81(uVar429 >> 0xf,0);
              in_ZMM19._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar734._60_4_;
              auVar734 = vpternlogd_avx512f(auVar737,auVar716,auVar729,0xea);
              uVar47 = vcmpps_avx512f(auVar734,auVar1774,1);
              auVar734 = vpternlogd_avx512f(auVar852,auVar716,auVar730,0xea);
              bVar12 = (bool)((byte)uVar430 & 1);
              bVar14 = (bool)((byte)(uVar430 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar430 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar430 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar430 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar430 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar430 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar430 >> 7) & 1);
              bVar21 = (bool)((byte)(uVar430 >> 8) & 1);
              bVar22 = (bool)((byte)(uVar430 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar430 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar430 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar430 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar430 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar430 >> 0xe) & 1);
              bVar28 = SUB81(uVar430 >> 0xf,0);
              bVar13 = (bool)((byte)uVar431 & 1);
              auVar754._0_4_ =
                   (uint)bVar13 * (bVar12 * in_ZMM19._0_4_ | (uint)!bVar12 * auVar734._0_4_) |
                   (uint)!bVar13 * (uint)((byte)uVar47 & 1) * auVar717._0_4_;
              bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
              auVar754._4_4_ =
                   (uint)bVar12 * (bVar14 * in_ZMM19._4_4_ | (uint)!bVar14 * auVar734._4_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 1) & 1) * auVar717._4_4_;
              bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
              auVar754._8_4_ =
                   (uint)bVar12 * (bVar15 * in_ZMM19._8_4_ | (uint)!bVar15 * auVar734._8_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 2) & 1) * auVar717._8_4_;
              bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
              auVar754._12_4_ =
                   (uint)bVar12 * (bVar16 * in_ZMM19._12_4_ | (uint)!bVar16 * auVar734._12_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 3) & 1) * auVar717._12_4_;
              bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
              auVar754._16_4_ =
                   (uint)bVar12 * (bVar17 * in_ZMM19._16_4_ | (uint)!bVar17 * auVar734._16_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 4) & 1) * auVar717._16_4_;
              bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
              auVar754._20_4_ =
                   (uint)bVar12 * (bVar18 * in_ZMM19._20_4_ | (uint)!bVar18 * auVar734._20_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 5) & 1) * auVar717._20_4_;
              bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
              auVar754._24_4_ =
                   (uint)bVar12 * (bVar19 * in_ZMM19._24_4_ | (uint)!bVar19 * auVar734._24_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 6) & 1) * auVar717._24_4_;
              bVar12 = (bool)((byte)(uVar431 >> 7) & 1);
              auVar754._28_4_ =
                   (uint)bVar12 * (bVar20 * in_ZMM19._28_4_ | (uint)!bVar20 * auVar734._28_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 7) & 1) * auVar717._28_4_;
              bVar12 = (bool)((byte)(uVar431 >> 8) & 1);
              auVar754._32_4_ =
                   (uint)bVar12 * (bVar21 * in_ZMM19._32_4_ | (uint)!bVar21 * auVar734._32_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 8) & 1) * auVar717._32_4_;
              bVar12 = (bool)((byte)(uVar431 >> 9) & 1);
              auVar754._36_4_ =
                   (uint)bVar12 * (bVar22 * in_ZMM19._36_4_ | (uint)!bVar22 * auVar734._36_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 9) & 1) * auVar717._36_4_;
              bVar12 = (bool)((byte)(uVar431 >> 10) & 1);
              auVar754._40_4_ =
                   (uint)bVar12 * (bVar23 * in_ZMM19._40_4_ | (uint)!bVar23 * auVar734._40_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 10) & 1) * auVar717._40_4_;
              bVar12 = (bool)((byte)(uVar431 >> 0xb) & 1);
              auVar754._44_4_ =
                   (uint)bVar12 * (bVar24 * in_ZMM19._44_4_ | (uint)!bVar24 * auVar734._44_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xb) & 1) * auVar717._44_4_;
              bVar12 = (bool)((byte)(uVar431 >> 0xc) & 1);
              auVar754._48_4_ =
                   (uint)bVar12 * (bVar25 * in_ZMM19._48_4_ | (uint)!bVar25 * auVar734._48_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xc) & 1) * auVar717._48_4_;
              bVar12 = (bool)((byte)(uVar431 >> 0xd) & 1);
              auVar754._52_4_ =
                   (uint)bVar12 * (bVar26 * in_ZMM19._52_4_ | (uint)!bVar26 * auVar734._52_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xd) & 1) * auVar717._52_4_;
              bVar12 = (bool)((byte)(uVar431 >> 0xe) & 1);
              auVar754._56_4_ =
                   (uint)bVar12 * (bVar27 * in_ZMM19._56_4_ | (uint)!bVar27 * auVar734._56_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xe) & 1) * auVar717._56_4_;
              bVar12 = SUB81(uVar431 >> 0xf,0);
              auVar754._60_4_ =
                   (uint)bVar12 * (bVar28 * in_ZMM19._60_4_ | (uint)!bVar28 * auVar734._60_4_) |
                   (uint)!bVar12 * (uint)(byte)(uVar47 >> 0xf) * auVar717._60_4_;
              ptr = (float *)((long)ptr + 0x40);
              *(undefined1 (*) [64])outptr = auVar754;
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)outptr + 0x40);
              iVar426 = iVar426 + 2;
              auVar734 = in_ZMM20;
            } while (iVar426 < (int)uVar425);
            uVar427 = uVar425 & 0x7ffffffe;
          }
          iVar426 = uVar425 - uVar427;
          if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
            auVar442 = ZEXT816(0) << 0x40;
            auVar984._8_4_ = 0x80000000;
            auVar984._0_8_ = 0x8000000080000000;
            auVar984._12_4_ = 0x80000000;
            auVar984._16_4_ = 0x80000000;
            auVar984._20_4_ = 0x80000000;
            auVar984._24_4_ = 0x80000000;
            auVar984._28_4_ = 0x80000000;
            auVar1057._8_4_ = 0x40490fdb;
            auVar1057._0_8_ = 0x40490fdb40490fdb;
            auVar1057._12_4_ = 0x40490fdb;
            auVar1057._16_4_ = 0x40490fdb;
            auVar1057._20_4_ = 0x40490fdb;
            auVar1057._24_4_ = 0x40490fdb;
            auVar1057._28_4_ = 0x40490fdb;
            auVar1134._8_4_ = 0x7fffffff;
            auVar1134._0_8_ = 0x7fffffff7fffffff;
            auVar1134._12_4_ = 0x7fffffff;
            auVar1134._16_4_ = 0x7fffffff;
            auVar1134._20_4_ = 0x7fffffff;
            auVar1134._24_4_ = 0x7fffffff;
            auVar1134._28_4_ = 0x7fffffff;
            auVar1194._8_4_ = 0x3f800000;
            auVar1194._0_8_ = 0x3f8000003f800000;
            auVar1194._12_4_ = 0x3f800000;
            auVar1194._16_4_ = 0x3f800000;
            auVar1194._20_4_ = 0x3f800000;
            auVar1194._24_4_ = 0x3f800000;
            auVar1194._28_4_ = 0x3f800000;
            auVar1249._8_4_ = 0xbc83a25c;
            auVar1249._0_8_ = 0xbc83a25cbc83a25c;
            auVar1249._12_4_ = 0xbc83a25c;
            auVar1249._16_4_ = 0xbc83a25c;
            auVar1249._20_4_ = 0xbc83a25c;
            auVar1249._24_4_ = 0xbc83a25c;
            auVar1249._28_4_ = 0xbc83a25c;
            auVar1311._8_4_ = 0xbd99b01e;
            auVar1311._0_8_ = 0xbd99b01ebd99b01e;
            auVar1311._12_4_ = 0xbd99b01e;
            auVar1311._16_4_ = 0xbd99b01e;
            auVar1311._20_4_ = 0xbd99b01e;
            auVar1311._24_4_ = 0xbd99b01e;
            auVar1311._28_4_ = 0xbd99b01e;
            auVar1370._8_4_ = 0xbe117200;
            auVar1370._0_8_ = 0xbe117200be117200;
            auVar1370._12_4_ = 0xbe117200;
            auVar1370._16_4_ = 0xbe117200;
            auVar1370._20_4_ = 0xbe117200;
            auVar1370._24_4_ = 0xbe117200;
            auVar1370._28_4_ = 0xbe117200;
            auVar1426._8_4_ = 0xbeaaaa53;
            auVar1426._0_8_ = 0xbeaaaa53beaaaa53;
            auVar1426._12_4_ = 0xbeaaaa53;
            auVar1426._16_4_ = 0xbeaaaa53;
            auVar1426._20_4_ = 0xbeaaaa53;
            auVar1426._24_4_ = 0xbeaaaa53;
            auVar1426._28_4_ = 0xbeaaaa53;
            auVar1480._8_4_ = 0x3b3ac537;
            auVar1480._0_8_ = 0x3b3ac5373b3ac537;
            auVar1480._12_4_ = 0x3b3ac537;
            auVar1480._16_4_ = 0x3b3ac537;
            auVar1480._20_4_ = 0x3b3ac537;
            auVar1480._24_4_ = 0x3b3ac537;
            auVar1480._28_4_ = 0x3b3ac537;
            auVar1534._8_4_ = 0x3d2edd4e;
            auVar1534._0_8_ = 0x3d2edd4e3d2edd4e;
            auVar1534._12_4_ = 0x3d2edd4e;
            auVar1534._16_4_ = 0x3d2edd4e;
            auVar1534._20_4_ = 0x3d2edd4e;
            auVar1534._24_4_ = 0x3d2edd4e;
            auVar1534._28_4_ = 0x3d2edd4e;
            auVar1588._8_4_ = 0x3dd9ed24;
            auVar1588._0_8_ = 0x3dd9ed243dd9ed24;
            auVar1588._12_4_ = 0x3dd9ed24;
            auVar1588._16_4_ = 0x3dd9ed24;
            auVar1588._20_4_ = 0x3dd9ed24;
            auVar1588._24_4_ = 0x3dd9ed24;
            auVar1588._28_4_ = 0x3dd9ed24;
            auVar1642._8_4_ = 0x3e4cb974;
            auVar1642._0_8_ = 0x3e4cb9743e4cb974;
            auVar1642._12_4_ = 0x3e4cb974;
            auVar1642._16_4_ = 0x3e4cb974;
            auVar1642._20_4_ = 0x3e4cb974;
            auVar1642._24_4_ = 0x3e4cb974;
            auVar1642._28_4_ = 0x3e4cb974;
            auVar1696._8_4_ = 0x3fc90fdb;
            auVar1696._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar1696._12_4_ = 0x3fc90fdb;
            auVar1696._16_4_ = 0x3fc90fdb;
            auVar1696._20_4_ = 0x3fc90fdb;
            auVar1696._24_4_ = 0x3fc90fdb;
            auVar1696._28_4_ = 0x3fc90fdb;
            auVar1748._8_4_ = 0x40490fdb;
            auVar1748._0_8_ = 0x40490fdb40490fdb;
            auVar1748._12_4_ = 0x40490fdb;
            auVar1748._16_4_ = 0x40490fdb;
            auVar1748._20_4_ = 0x40490fdb;
            auVar1748._24_4_ = 0x40490fdb;
            auVar1748._28_4_ = 0x40490fdb;
            auVar1799._8_4_ = 0x3fc90fdb;
            auVar1799._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar1799._12_4_ = 0x3fc90fdb;
            auVar1799._16_4_ = 0x3fc90fdb;
            auVar1799._20_4_ = 0x3fc90fdb;
            auVar1799._24_4_ = 0x3fc90fdb;
            auVar1799._28_4_ = 0x3fc90fdb;
            do {
              auVar677 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
              auVar674 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
              auVar678 = vdivps_avx512vl(auVar677,auVar674);
              in_ZMM18 = ZEXT3264(auVar678);
              uVar47 = vcmpps_avx512vl(auVar677,ZEXT1632(auVar442),1);
              vandps_avx512vl(auVar678,auVar1134);
              auVar172._8_4_ = 0xc0490fdb;
              auVar172._0_8_ = 0xc0490fdbc0490fdb;
              auVar172._12_4_ = 0xc0490fdb;
              auVar172._16_4_ = 0xc0490fdb;
              auVar172._20_4_ = 0xc0490fdb;
              auVar172._24_4_ = 0xc0490fdb;
              auVar172._28_4_ = 0xc0490fdb;
              auVar562 = vblendmps_avx512vl(auVar1057,auVar172);
              bVar12 = (bool)((byte)uVar47 & 1);
              auVar583._0_4_ = (uint)bVar12 * auVar562._0_4_ | (uint)!bVar12 * in_ZMM20._0_4_;
              bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
              auVar583._4_4_ = (uint)bVar12 * auVar562._4_4_ | (uint)!bVar12 * in_ZMM20._4_4_;
              bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
              auVar583._8_4_ = (uint)bVar12 * auVar562._8_4_ | (uint)!bVar12 * in_ZMM20._8_4_;
              bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
              auVar583._12_4_ = (uint)bVar12 * auVar562._12_4_ | (uint)!bVar12 * in_ZMM20._12_4_;
              bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
              auVar583._16_4_ = (uint)bVar12 * auVar562._16_4_ | (uint)!bVar12 * in_ZMM20._16_4_;
              bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
              auVar583._20_4_ = (uint)bVar12 * auVar562._20_4_ | (uint)!bVar12 * in_ZMM20._20_4_;
              bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
              auVar583._24_4_ = (uint)bVar12 * auVar562._24_4_ | (uint)!bVar12 * in_ZMM20._24_4_;
              bVar12 = SUB81(uVar47 >> 7,0);
              auVar583._28_4_ = (uint)bVar12 * auVar562._28_4_ | (uint)!bVar12 * in_ZMM20._28_4_;
              in_ZMM20 = ZEXT3264(auVar583);
              uVar47 = vcmpps_avx512vl(auVar1194,auVar678,1);
              auVar173._8_4_ = 0xbf800000;
              auVar173._0_8_ = 0xbf800000bf800000;
              auVar173._12_4_ = 0xbf800000;
              auVar173._16_4_ = 0xbf800000;
              auVar173._20_4_ = 0xbf800000;
              auVar173._24_4_ = 0xbf800000;
              auVar173._28_4_ = 0xbf800000;
              auVar562 = vblendmps_avx512vl(auVar678,auVar173);
              bVar29 = (byte)uVar47;
              auVar584._0_4_ =
                   (uint)(bVar29 & 1) * auVar562._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM21._0_4_;
              bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
              auVar584._4_4_ = (uint)bVar12 * auVar562._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
              bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
              auVar584._8_4_ = (uint)bVar12 * auVar562._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
              bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
              auVar584._12_4_ = (uint)bVar12 * auVar562._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
              bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
              auVar584._16_4_ = (uint)bVar12 * auVar562._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
              bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
              auVar584._20_4_ = (uint)bVar12 * auVar562._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
              bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
              auVar584._24_4_ = (uint)bVar12 * auVar562._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
              bVar12 = SUB81(uVar47 >> 7,0);
              auVar584._28_4_ = (uint)bVar12 * auVar562._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
              auVar562 = vdivps_avx512vl(auVar584,auVar678);
              auVar585._0_4_ =
                   (uint)(bVar29 & 1) * auVar562._0_4_ | !(bool)(bVar29 & 1) * auVar584._0_4_;
              bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
              auVar585._4_4_ = (uint)bVar12 * auVar562._4_4_ | !bVar12 * auVar584._4_4_;
              bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
              auVar585._8_4_ = (uint)bVar12 * auVar562._8_4_ | !bVar12 * auVar584._8_4_;
              bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
              auVar585._12_4_ = (uint)bVar12 * auVar562._12_4_ | !bVar12 * auVar584._12_4_;
              bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
              auVar585._16_4_ = (uint)bVar12 * auVar562._16_4_ | !bVar12 * auVar584._16_4_;
              bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
              auVar585._20_4_ = (uint)bVar12 * auVar562._20_4_ | !bVar12 * auVar584._20_4_;
              bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
              auVar585._24_4_ = (uint)bVar12 * auVar562._24_4_ | !bVar12 * auVar584._24_4_;
              bVar12 = SUB81(uVar47 >> 7,0);
              auVar585._28_4_ = (uint)bVar12 * auVar562._28_4_ | !bVar12 * auVar584._28_4_;
              in_ZMM21 = ZEXT3264(auVar585);
              uVar430 = vcmpps_avx512vl(auVar677,ZEXT1632(auVar442),4);
              auVar683 = ZEXT1632(auVar442);
              uVar429 = vcmpps_avx512vl(auVar674,auVar683,1);
              auVar562 = vmulps_avx512vl(auVar585,auVar585);
              vandps_avx512vl(auVar677,auVar984);
              auVar677 = vmulps_avx512vl(auVar562,auVar562);
              auVar679 = vfmadd213ps_avx512vl(auVar1249,auVar677,auVar1311);
              auVar679 = vfmadd213ps_avx512vl(auVar679,auVar677,auVar1370);
              auVar680 = vfmadd213ps_avx512vl(auVar1480,auVar677,auVar1534);
              auVar680 = vfmadd213ps_avx512vl(auVar680,auVar677,auVar1588);
              auVar679 = vfmadd213ps_avx512vl(auVar679,auVar677,auVar1426);
              auVar680 = vfmadd213ps_avx512vl(auVar680,auVar677,auVar1642);
              auVar677 = vfmadd213ps_avx512vl(auVar680,auVar677,auVar1194);
              auVar677 = vfmadd231ps_avx512vl(auVar677,auVar562,auVar679);
              uVar431 = vcmpps_avx512vl(auVar674,auVar683,4);
              uVar431 = uVar430 & uVar431;
              auVar677 = vmulps_avx512vl(auVar677,auVar585);
              auVar679 = vaddps_avx512vl(auVar677,auVar1696);
              auVar586._0_4_ =
                   (uint)(bVar29 & 1) * auVar679._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar677._0_4_;
              bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
              auVar586._4_4_ = (uint)bVar12 * auVar679._4_4_ | (uint)!bVar12 * auVar677._4_4_;
              bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
              auVar586._8_4_ = (uint)bVar12 * auVar679._8_4_ | (uint)!bVar12 * auVar677._8_4_;
              bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
              auVar586._12_4_ = (uint)bVar12 * auVar679._12_4_ | (uint)!bVar12 * auVar677._12_4_;
              bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
              auVar586._16_4_ = (uint)bVar12 * auVar679._16_4_ | (uint)!bVar12 * auVar677._16_4_;
              bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
              auVar586._20_4_ = (uint)bVar12 * auVar679._20_4_ | (uint)!bVar12 * auVar677._20_4_;
              bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
              auVar586._24_4_ = (uint)bVar12 * auVar679._24_4_ | (uint)!bVar12 * auVar677._24_4_;
              bVar12 = SUB81(uVar47 >> 7,0);
              auVar586._28_4_ = (uint)bVar12 * auVar679._28_4_ | (uint)!bVar12 * auVar677._28_4_;
              auVar677 = vpternlogd_avx512vl(auVar586,auVar678,auVar984,0xf8);
              auVar678 = vaddps_avx512vl(auVar677,auVar583);
              bVar12 = (bool)((byte)uVar429 & 1);
              uVar427 = (uint)bVar12 * auVar678._0_4_ | (uint)!bVar12 * auVar677._0_4_;
              bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
              uVar882 = (uint)bVar12 * auVar678._4_4_ | (uint)!bVar12 * auVar677._4_4_;
              bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
              uVar883 = (uint)bVar12 * auVar678._8_4_ | (uint)!bVar12 * auVar677._8_4_;
              bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
              uVar884 = (uint)bVar12 * auVar678._12_4_ | (uint)!bVar12 * auVar677._12_4_;
              bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
              uVar885 = (uint)bVar12 * auVar678._16_4_ | (uint)!bVar12 * auVar677._16_4_;
              bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
              uVar886 = (uint)bVar12 * auVar678._20_4_ | (uint)!bVar12 * auVar677._20_4_;
              bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
              uVar887 = (uint)bVar12 * auVar678._24_4_ | (uint)!bVar12 * auVar677._24_4_;
              bVar12 = SUB81(uVar429 >> 7,0);
              uVar888 = (uint)bVar12 * auVar678._28_4_ | (uint)!bVar12 * auVar677._28_4_;
              in_ZMM19 = ZEXT3264(CONCAT428(uVar888,CONCAT424(uVar887,CONCAT420(uVar886,CONCAT416(
                                                  uVar885,CONCAT412(uVar884,CONCAT48(uVar883,
                                                  CONCAT44(uVar882,uVar427))))))));
              auVar674 = vpternlogd_avx512vl(auVar674,auVar1748,auVar984,0xec);
              uVar46 = vcmpps_avx512vl(auVar683,auVar674,2);
              auVar674 = vorps_avx512vl(auVar562,auVar1799);
              auVar587._4_4_ = (uint)((byte)(uVar430 >> 1) & 1) * auVar674._4_4_;
              auVar587._0_4_ = (uint)((byte)uVar430 & 1) * auVar674._0_4_;
              auVar587._8_4_ = (uint)((byte)(uVar430 >> 2) & 1) * auVar674._8_4_;
              auVar587._12_4_ = (uint)((byte)(uVar430 >> 3) & 1) * auVar674._12_4_;
              auVar587._16_4_ = (uint)((byte)(uVar430 >> 4) & 1) * auVar674._16_4_;
              auVar587._20_4_ = (uint)((byte)(uVar430 >> 5) & 1) * auVar674._20_4_;
              auVar587._24_4_ = (uint)((byte)(uVar430 >> 6) & 1) * auVar674._24_4_;
              auVar587._28_4_ = (uint)(byte)(uVar430 >> 7) * auVar674._28_4_;
              bVar29 = (byte)uVar430 | (byte)uVar46;
              auVar674 = vorps_avx512vl(auVar587,auVar1748);
              auVar677 = vmovdqa32_avx512vl(auVar587);
              bVar13 = (bool)(bVar29 >> 1 & 1);
              bVar14 = (bool)(bVar29 >> 2 & 1);
              bVar15 = (bool)(bVar29 >> 3 & 1);
              bVar16 = (bool)(bVar29 >> 4 & 1);
              bVar17 = (bool)(bVar29 >> 5 & 1);
              bVar18 = (bool)(bVar29 >> 6 & 1);
              bVar12 = (bool)((byte)uVar431 & 1);
              auVar588._0_4_ =
                   bVar12 * uVar427 |
                   (uint)!bVar12 *
                   ((uint)(bVar29 & 1) * auVar677._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar674._0_4_
                   );
              bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
              auVar588._4_4_ =
                   bVar12 * uVar882 |
                   (uint)!bVar12 * ((uint)bVar13 * auVar677._4_4_ | (uint)!bVar13 * auVar674._4_4_);
              bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
              auVar588._8_4_ =
                   bVar12 * uVar883 |
                   (uint)!bVar12 * ((uint)bVar14 * auVar677._8_4_ | (uint)!bVar14 * auVar674._8_4_);
              bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
              auVar588._12_4_ =
                   bVar12 * uVar884 |
                   (uint)!bVar12 *
                   ((uint)bVar15 * auVar677._12_4_ | (uint)!bVar15 * auVar674._12_4_);
              bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
              auVar588._16_4_ =
                   bVar12 * uVar885 |
                   (uint)!bVar12 *
                   ((uint)bVar16 * auVar677._16_4_ | (uint)!bVar16 * auVar674._16_4_);
              bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
              auVar588._20_4_ =
                   bVar12 * uVar886 |
                   (uint)!bVar12 *
                   ((uint)bVar17 * auVar677._20_4_ | (uint)!bVar17 * auVar674._20_4_);
              bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
              auVar588._24_4_ =
                   bVar12 * uVar887 |
                   (uint)!bVar12 *
                   ((uint)bVar18 * auVar677._24_4_ | (uint)!bVar18 * auVar674._24_4_);
              bVar12 = SUB81(uVar431 >> 7,0);
              auVar588._28_4_ =
                   bVar12 * uVar888 |
                   (uint)!bVar12 *
                   ((uint)(bVar29 >> 7) * auVar677._28_4_ |
                   (uint)!(bool)(bVar29 >> 7) * auVar674._28_4_);
              *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar588;
              ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
              ptr1 = ptr1 + 1;
              outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
              iVar426 = iVar426 + -1;
            } while (iVar426 != 0);
          }
        }
        if (iVar424 == 4) {
          uVar427 = 0;
          if (3 < (int)uVar425) {
            iVar424 = 3;
            auVar730 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar734 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar716 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar717 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            auVar718 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar719 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
            auVar720 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
            auVar721 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
            auVar722 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
            auVar723 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
            auVar724 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
            auVar725 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
            auVar726 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
            auVar727 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar728 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
            auVar729 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
            do {
              auVar442 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[2]));
              auVar460 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[3]));
              auVar1774 = *(undefined1 (*) [64])ptr;
              auVar461 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
              auVar674 = vinsertf32x4_avx512vl(ZEXT1632(auVar442),auVar460,1);
              auVar442 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
              auVar677 = vinsertf32x4_avx512vl(ZEXT1632(auVar461),auVar442,1);
              auVar737 = vinsertf64x4_avx512f(ZEXT3264(auVar677),auVar674,1);
              auVar852 = vdivps_avx512f(auVar737,auVar1774);
              uVar47 = vcmpps_avx512f(auVar737,auVar730,1);
              auVar733 = vandps_avx512dq(auVar852,auVar717);
              auVar330._8_4_ = 0xc0490fdb;
              auVar330._0_8_ = 0xc0490fdbc0490fdb;
              auVar330._12_4_ = 0xc0490fdb;
              auVar330._16_4_ = 0xc0490fdb;
              auVar330._20_4_ = 0xc0490fdb;
              auVar330._24_4_ = 0xc0490fdb;
              auVar330._28_4_ = 0xc0490fdb;
              auVar330._32_4_ = 0xc0490fdb;
              auVar330._36_4_ = 0xc0490fdb;
              auVar330._40_4_ = 0xc0490fdb;
              auVar330._44_4_ = 0xc0490fdb;
              auVar330._48_4_ = 0xc0490fdb;
              auVar330._52_4_ = 0xc0490fdb;
              auVar330._56_4_ = 0xc0490fdb;
              auVar330._60_4_ = 0xc0490fdb;
              auVar736 = vblendmps_avx512f(auVar716,auVar330);
              bVar12 = (bool)((byte)uVar47 & 1);
              auVar755._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * in_ZMM20._0_4_;
              bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
              auVar755._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * in_ZMM20._4_4_;
              bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
              auVar755._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * in_ZMM20._8_4_;
              bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
              auVar755._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * in_ZMM20._12_4_;
              bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
              auVar755._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * in_ZMM20._16_4_;
              bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
              auVar755._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * in_ZMM20._20_4_;
              bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
              auVar755._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * in_ZMM20._24_4_;
              bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
              auVar755._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * in_ZMM20._28_4_;
              bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
              auVar755._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * in_ZMM20._32_4_;
              bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
              auVar755._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * in_ZMM20._36_4_;
              bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
              auVar755._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * in_ZMM20._40_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
              auVar755._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * in_ZMM20._44_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
              auVar755._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * in_ZMM20._48_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
              auVar755._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * in_ZMM20._52_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
              auVar755._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * in_ZMM20._56_4_;
              bVar12 = SUB81(uVar47 >> 0xf,0);
              auVar755._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * in_ZMM20._60_4_;
              uVar47 = vcmpps_avx512f(auVar718,auVar733,1);
              auVar331._8_4_ = 0xbf800000;
              auVar331._0_8_ = 0xbf800000bf800000;
              auVar331._12_4_ = 0xbf800000;
              auVar331._16_4_ = 0xbf800000;
              auVar331._20_4_ = 0xbf800000;
              auVar331._24_4_ = 0xbf800000;
              auVar331._28_4_ = 0xbf800000;
              auVar331._32_4_ = 0xbf800000;
              auVar331._36_4_ = 0xbf800000;
              auVar331._40_4_ = 0xbf800000;
              auVar331._44_4_ = 0xbf800000;
              auVar331._48_4_ = 0xbf800000;
              auVar331._52_4_ = 0xbf800000;
              auVar331._56_4_ = 0xbf800000;
              auVar331._60_4_ = 0xbf800000;
              auVar736 = vblendmps_avx512f(auVar733,auVar331);
              bVar12 = (bool)((byte)uVar47 & 1);
              auVar756._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * in_ZMM21._0_4_;
              bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
              auVar756._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
              bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
              auVar756._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
              bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
              auVar756._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
              bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
              auVar756._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
              bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
              auVar756._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
              bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
              auVar756._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
              bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
              auVar756._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
              bVar29 = (byte)(uVar47 >> 8);
              bVar12 = (bool)(bVar29 & 1);
              auVar756._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * in_ZMM21._32_4_;
              bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
              auVar756._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * in_ZMM21._36_4_;
              bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
              auVar756._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * in_ZMM21._40_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
              auVar756._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * in_ZMM21._44_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
              auVar756._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * in_ZMM21._48_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
              auVar756._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * in_ZMM21._52_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
              auVar756._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * in_ZMM21._56_4_;
              bVar12 = SUB81(uVar47 >> 0xf,0);
              auVar756._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * in_ZMM21._60_4_;
              auVar733 = vmaxps_avx512f(auVar733,auVar718);
              auVar733 = vdivps_avx512f(auVar756,auVar733);
              uVar430 = vcmpps_avx512f(auVar1774,auVar730,4);
              in_ZMM21 = vmulps_avx512f(auVar733,auVar733);
              uVar429 = vcmpps_avx512f(auVar1774,auVar730,1);
              auVar736 = vmulps_avx512f(in_ZMM21,in_ZMM21);
              auVar731 = vfmadd213ps_avx512f(auVar719,auVar736,auVar720);
              auVar731 = vfmadd213ps_avx512f(auVar731,auVar736,auVar721);
              auVar732 = vfmadd213ps_avx512f(auVar723,auVar736,auVar724);
              auVar732 = vfmadd213ps_avx512f(auVar732,auVar736,auVar725);
              auVar731 = vfmadd213ps_avx512f(auVar731,auVar736,auVar722);
              auVar732 = vfmadd213ps_avx512f(auVar732,auVar736,auVar726);
              auVar736 = vfmadd213ps_avx512f(auVar732,auVar736,auVar718);
              auVar736 = vfmadd231ps_avx512f(auVar736,in_ZMM21,auVar731);
              uVar431 = vcmpps_avx512f(auVar737,auVar730,4);
              auVar733 = vmulps_avx512f(auVar736,auVar733);
              auVar736 = vaddps_avx512f(auVar733,auVar727);
              bVar12 = (bool)((byte)uVar47 & 1);
              auVar757._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * auVar733._0_4_;
              bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
              auVar757._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * auVar733._4_4_;
              bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
              auVar757._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * auVar733._8_4_;
              bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
              auVar757._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * auVar733._12_4_;
              bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
              auVar757._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * auVar733._16_4_;
              bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
              auVar757._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * auVar733._20_4_;
              bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
              auVar757._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * auVar733._24_4_;
              bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
              auVar757._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * auVar733._28_4_;
              bVar12 = (bool)(bVar29 & 1);
              auVar757._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * auVar733._32_4_;
              bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
              auVar757._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * auVar733._36_4_;
              bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
              auVar757._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * auVar733._40_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
              auVar757._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * auVar733._44_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
              auVar757._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * auVar733._48_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
              auVar757._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * auVar733._52_4_;
              bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
              auVar757._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * auVar733._56_4_;
              bVar12 = SUB81(uVar47 >> 0xf,0);
              auVar757._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * auVar733._60_4_;
              auVar852 = vpternlogd_avx512f(auVar757,auVar852,auVar734,0xf8);
              auVar733 = vaddps_avx512f(auVar852,auVar755);
              bVar12 = (bool)((byte)uVar429 & 1);
              in_ZMM19._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar852._0_4_;
              bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
              in_ZMM19._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar852._4_4_;
              bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
              in_ZMM19._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar852._8_4_;
              bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
              in_ZMM19._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar852._12_4_;
              bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
              in_ZMM19._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar852._16_4_;
              bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
              in_ZMM19._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar852._20_4_;
              bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
              in_ZMM19._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar852._24_4_;
              bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
              in_ZMM19._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar852._28_4_;
              bVar12 = (bool)((byte)(uVar429 >> 8) & 1);
              in_ZMM19._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar852._32_4_;
              bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
              in_ZMM19._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar852._36_4_;
              bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
              in_ZMM19._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar852._40_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
              in_ZMM19._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar852._44_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
              in_ZMM19._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar852._48_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
              in_ZMM19._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar852._52_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
              in_ZMM19._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar852._56_4_;
              bVar12 = SUB81(uVar429 >> 0xf,0);
              in_ZMM19._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar852._60_4_;
              in_ZMM18 = vpternlogd_avx512f(auVar1774,auVar734,auVar728,0xea);
              uVar47 = vcmpps_avx512f(in_ZMM18,auVar730,1);
              auVar1774 = vpternlogd_avx512f(auVar737,auVar734,auVar729,0xea);
              bVar12 = (bool)((byte)uVar430 & 1);
              bVar14 = (bool)((byte)(uVar430 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar430 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar430 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar430 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar430 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar430 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar430 >> 7) & 1);
              bVar21 = (bool)((byte)(uVar430 >> 8) & 1);
              bVar22 = (bool)((byte)(uVar430 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar430 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar430 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar430 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar430 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar430 >> 0xe) & 1);
              bVar28 = SUB81(uVar430 >> 0xf,0);
              bVar13 = (bool)((byte)uVar431 & 1);
              auVar758._0_4_ =
                   (uint)bVar13 * (bVar12 * in_ZMM19._0_4_ | (uint)!bVar12 * auVar1774._0_4_) |
                   (uint)!bVar13 * (uint)((byte)uVar47 & 1) * auVar716._0_4_;
              bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
              auVar758._4_4_ =
                   (uint)bVar12 * (bVar14 * in_ZMM19._4_4_ | (uint)!bVar14 * auVar1774._4_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 1) & 1) * auVar716._4_4_;
              bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
              auVar758._8_4_ =
                   (uint)bVar12 * (bVar15 * in_ZMM19._8_4_ | (uint)!bVar15 * auVar1774._8_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 2) & 1) * auVar716._8_4_;
              bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
              auVar758._12_4_ =
                   (uint)bVar12 * (bVar16 * in_ZMM19._12_4_ | (uint)!bVar16 * auVar1774._12_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 3) & 1) * auVar716._12_4_;
              bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
              auVar758._16_4_ =
                   (uint)bVar12 * (bVar17 * in_ZMM19._16_4_ | (uint)!bVar17 * auVar1774._16_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 4) & 1) * auVar716._16_4_;
              bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
              auVar758._20_4_ =
                   (uint)bVar12 * (bVar18 * in_ZMM19._20_4_ | (uint)!bVar18 * auVar1774._20_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 5) & 1) * auVar716._20_4_;
              bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
              auVar758._24_4_ =
                   (uint)bVar12 * (bVar19 * in_ZMM19._24_4_ | (uint)!bVar19 * auVar1774._24_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 6) & 1) * auVar716._24_4_;
              bVar12 = (bool)((byte)(uVar431 >> 7) & 1);
              auVar758._28_4_ =
                   (uint)bVar12 * (bVar20 * in_ZMM19._28_4_ | (uint)!bVar20 * auVar1774._28_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 7) & 1) * auVar716._28_4_;
              bVar12 = (bool)((byte)(uVar431 >> 8) & 1);
              auVar758._32_4_ =
                   (uint)bVar12 * (bVar21 * in_ZMM19._32_4_ | (uint)!bVar21 * auVar1774._32_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 8) & 1) * auVar716._32_4_;
              bVar12 = (bool)((byte)(uVar431 >> 9) & 1);
              auVar758._36_4_ =
                   (uint)bVar12 * (bVar22 * in_ZMM19._36_4_ | (uint)!bVar22 * auVar1774._36_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 9) & 1) * auVar716._36_4_;
              bVar12 = (bool)((byte)(uVar431 >> 10) & 1);
              auVar758._40_4_ =
                   (uint)bVar12 * (bVar23 * in_ZMM19._40_4_ | (uint)!bVar23 * auVar1774._40_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 10) & 1) * auVar716._40_4_;
              bVar12 = (bool)((byte)(uVar431 >> 0xb) & 1);
              auVar758._44_4_ =
                   (uint)bVar12 * (bVar24 * in_ZMM19._44_4_ | (uint)!bVar24 * auVar1774._44_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xb) & 1) * auVar716._44_4_;
              bVar12 = (bool)((byte)(uVar431 >> 0xc) & 1);
              auVar758._48_4_ =
                   (uint)bVar12 * (bVar25 * in_ZMM19._48_4_ | (uint)!bVar25 * auVar1774._48_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xc) & 1) * auVar716._48_4_;
              bVar12 = (bool)((byte)(uVar431 >> 0xd) & 1);
              auVar758._52_4_ =
                   (uint)bVar12 * (bVar26 * in_ZMM19._52_4_ | (uint)!bVar26 * auVar1774._52_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xd) & 1) * auVar716._52_4_;
              bVar12 = (bool)((byte)(uVar431 >> 0xe) & 1);
              auVar758._56_4_ =
                   (uint)bVar12 * (bVar27 * in_ZMM19._56_4_ | (uint)!bVar27 * auVar1774._56_4_) |
                   (uint)!bVar12 * (uint)((byte)(uVar47 >> 0xe) & 1) * auVar716._56_4_;
              bVar12 = SUB81(uVar431 >> 0xf,0);
              auVar758._60_4_ =
                   (uint)bVar12 * (bVar28 * in_ZMM19._60_4_ | (uint)!bVar28 * auVar1774._60_4_) |
                   (uint)!bVar12 * (uint)(byte)(uVar47 >> 0xf) * auVar716._60_4_;
              ptr = (float *)((long)ptr + 0x40);
              *(undefined1 (*) [64])outptr = auVar758;
              ptr1 = ptr1 + 4;
              outptr = (float *)((long)outptr + 0x40);
              iVar424 = iVar424 + 4;
              in_ZMM20 = auVar755;
            } while (iVar424 < (int)uVar425);
            uVar427 = uVar425 & 0x7ffffffc;
          }
          if ((int)(uVar427 | 1) < (int)uVar425) {
            auVar442 = ZEXT816(0) << 0x40;
            auVar985._8_4_ = 0x80000000;
            auVar985._0_8_ = 0x8000000080000000;
            auVar985._12_4_ = 0x80000000;
            auVar985._16_4_ = 0x80000000;
            auVar985._20_4_ = 0x80000000;
            auVar985._24_4_ = 0x80000000;
            auVar985._28_4_ = 0x80000000;
            auVar1058._8_4_ = 0x40490fdb;
            auVar1058._0_8_ = 0x40490fdb40490fdb;
            auVar1058._12_4_ = 0x40490fdb;
            auVar1058._16_4_ = 0x40490fdb;
            auVar1058._20_4_ = 0x40490fdb;
            auVar1058._24_4_ = 0x40490fdb;
            auVar1058._28_4_ = 0x40490fdb;
            auVar1135._8_4_ = 0x7fffffff;
            auVar1135._0_8_ = 0x7fffffff7fffffff;
            auVar1135._12_4_ = 0x7fffffff;
            auVar1135._16_4_ = 0x7fffffff;
            auVar1135._20_4_ = 0x7fffffff;
            auVar1135._24_4_ = 0x7fffffff;
            auVar1135._28_4_ = 0x7fffffff;
            auVar1195._8_4_ = 0x3f800000;
            auVar1195._0_8_ = 0x3f8000003f800000;
            auVar1195._12_4_ = 0x3f800000;
            auVar1195._16_4_ = 0x3f800000;
            auVar1195._20_4_ = 0x3f800000;
            auVar1195._24_4_ = 0x3f800000;
            auVar1195._28_4_ = 0x3f800000;
            auVar1250._8_4_ = 0xbc83a25c;
            auVar1250._0_8_ = 0xbc83a25cbc83a25c;
            auVar1250._12_4_ = 0xbc83a25c;
            auVar1250._16_4_ = 0xbc83a25c;
            auVar1250._20_4_ = 0xbc83a25c;
            auVar1250._24_4_ = 0xbc83a25c;
            auVar1250._28_4_ = 0xbc83a25c;
            auVar1312._8_4_ = 0xbd99b01e;
            auVar1312._0_8_ = 0xbd99b01ebd99b01e;
            auVar1312._12_4_ = 0xbd99b01e;
            auVar1312._16_4_ = 0xbd99b01e;
            auVar1312._20_4_ = 0xbd99b01e;
            auVar1312._24_4_ = 0xbd99b01e;
            auVar1312._28_4_ = 0xbd99b01e;
            auVar1371._8_4_ = 0xbe117200;
            auVar1371._0_8_ = 0xbe117200be117200;
            auVar1371._12_4_ = 0xbe117200;
            auVar1371._16_4_ = 0xbe117200;
            auVar1371._20_4_ = 0xbe117200;
            auVar1371._24_4_ = 0xbe117200;
            auVar1371._28_4_ = 0xbe117200;
            auVar1427._8_4_ = 0xbeaaaa53;
            auVar1427._0_8_ = 0xbeaaaa53beaaaa53;
            auVar1427._12_4_ = 0xbeaaaa53;
            auVar1427._16_4_ = 0xbeaaaa53;
            auVar1427._20_4_ = 0xbeaaaa53;
            auVar1427._24_4_ = 0xbeaaaa53;
            auVar1427._28_4_ = 0xbeaaaa53;
            auVar1481._8_4_ = 0x3b3ac537;
            auVar1481._0_8_ = 0x3b3ac5373b3ac537;
            auVar1481._12_4_ = 0x3b3ac537;
            auVar1481._16_4_ = 0x3b3ac537;
            auVar1481._20_4_ = 0x3b3ac537;
            auVar1481._24_4_ = 0x3b3ac537;
            auVar1481._28_4_ = 0x3b3ac537;
            auVar1535._8_4_ = 0x3d2edd4e;
            auVar1535._0_8_ = 0x3d2edd4e3d2edd4e;
            auVar1535._12_4_ = 0x3d2edd4e;
            auVar1535._16_4_ = 0x3d2edd4e;
            auVar1535._20_4_ = 0x3d2edd4e;
            auVar1535._24_4_ = 0x3d2edd4e;
            auVar1535._28_4_ = 0x3d2edd4e;
            auVar1589._8_4_ = 0x3dd9ed24;
            auVar1589._0_8_ = 0x3dd9ed243dd9ed24;
            auVar1589._12_4_ = 0x3dd9ed24;
            auVar1589._16_4_ = 0x3dd9ed24;
            auVar1589._20_4_ = 0x3dd9ed24;
            auVar1589._24_4_ = 0x3dd9ed24;
            auVar1589._28_4_ = 0x3dd9ed24;
            auVar1643._8_4_ = 0x3e4cb974;
            auVar1643._0_8_ = 0x3e4cb9743e4cb974;
            auVar1643._12_4_ = 0x3e4cb974;
            auVar1643._16_4_ = 0x3e4cb974;
            auVar1643._20_4_ = 0x3e4cb974;
            auVar1643._24_4_ = 0x3e4cb974;
            auVar1643._28_4_ = 0x3e4cb974;
            auVar1697._8_4_ = 0x3fc90fdb;
            auVar1697._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar1697._12_4_ = 0x3fc90fdb;
            auVar1697._16_4_ = 0x3fc90fdb;
            auVar1697._20_4_ = 0x3fc90fdb;
            auVar1697._24_4_ = 0x3fc90fdb;
            auVar1697._28_4_ = 0x3fc90fdb;
            auVar1749._8_4_ = 0x40490fdb;
            auVar1749._0_8_ = 0x40490fdb40490fdb;
            auVar1749._12_4_ = 0x40490fdb;
            auVar1749._16_4_ = 0x40490fdb;
            auVar1749._20_4_ = 0x40490fdb;
            auVar1749._24_4_ = 0x40490fdb;
            auVar1749._28_4_ = 0x40490fdb;
            auVar1800._8_4_ = 0x3fc90fdb;
            auVar1800._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar1800._12_4_ = 0x3fc90fdb;
            auVar1800._16_4_ = 0x3fc90fdb;
            auVar1800._20_4_ = 0x3fc90fdb;
            auVar1800._24_4_ = 0x3fc90fdb;
            auVar1800._28_4_ = 0x3fc90fdb;
            uVar882 = uVar427;
            do {
              auVar460 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
              auVar461 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
              auVar674 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
              auVar677 = vinsertf32x4_avx512vl(ZEXT1632(auVar460),auVar461,1);
              auVar678 = vdivps_avx512vl(auVar677,auVar674);
              uVar47 = vcmpps_avx512vl(auVar677,ZEXT1632(auVar442),1);
              auVar174._8_4_ = 0xc0490fdb;
              auVar174._0_8_ = 0xc0490fdbc0490fdb;
              auVar174._12_4_ = 0xc0490fdb;
              auVar174._16_4_ = 0xc0490fdb;
              auVar174._20_4_ = 0xc0490fdb;
              auVar174._24_4_ = 0xc0490fdb;
              auVar174._28_4_ = 0xc0490fdb;
              auVar562 = vblendmps_avx512vl(auVar1058,auVar174);
              bVar12 = (bool)((byte)uVar47 & 1);
              auVar589._0_4_ = (uint)bVar12 * auVar562._0_4_ | (uint)!bVar12 * in_ZMM19._0_4_;
              bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
              auVar589._4_4_ = (uint)bVar12 * auVar562._4_4_ | (uint)!bVar12 * in_ZMM19._4_4_;
              bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
              auVar589._8_4_ = (uint)bVar12 * auVar562._8_4_ | (uint)!bVar12 * in_ZMM19._8_4_;
              bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
              auVar589._12_4_ = (uint)bVar12 * auVar562._12_4_ | (uint)!bVar12 * in_ZMM19._12_4_;
              bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
              auVar589._16_4_ = (uint)bVar12 * auVar562._16_4_ | (uint)!bVar12 * in_ZMM19._16_4_;
              bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
              auVar589._20_4_ = (uint)bVar12 * auVar562._20_4_ | (uint)!bVar12 * in_ZMM19._20_4_;
              bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
              auVar589._24_4_ = (uint)bVar12 * auVar562._24_4_ | (uint)!bVar12 * in_ZMM19._24_4_;
              bVar12 = SUB81(uVar47 >> 7,0);
              auVar589._28_4_ = (uint)bVar12 * auVar562._28_4_ | (uint)!bVar12 * in_ZMM19._28_4_;
              in_ZMM19 = ZEXT3264(auVar589);
              uVar47 = vcmpps_avx512vl(auVar674,ZEXT1632(auVar442),1);
              vandps_avx512vl(auVar678,auVar1135);
              uVar430 = vcmpps_avx512vl(auVar1195,auVar589,1);
              auVar175._8_4_ = 0xbf800000;
              auVar175._0_8_ = 0xbf800000bf800000;
              auVar175._12_4_ = 0xbf800000;
              auVar175._16_4_ = 0xbf800000;
              auVar175._20_4_ = 0xbf800000;
              auVar175._24_4_ = 0xbf800000;
              auVar175._28_4_ = 0xbf800000;
              auVar562 = vblendmps_avx512vl(auVar589,auVar175);
              bVar29 = (byte)uVar430;
              auVar590._0_4_ =
                   (uint)(bVar29 & 1) * auVar562._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM21._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar590._4_4_ = (uint)bVar12 * auVar562._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar590._8_4_ = (uint)bVar12 * auVar562._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar590._12_4_ = (uint)bVar12 * auVar562._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
              bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
              auVar590._16_4_ = (uint)bVar12 * auVar562._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
              bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
              auVar590._20_4_ = (uint)bVar12 * auVar562._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
              bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
              auVar590._24_4_ = (uint)bVar12 * auVar562._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
              bVar12 = SUB81(uVar430 >> 7,0);
              auVar590._28_4_ = (uint)bVar12 * auVar562._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
              auVar683 = ZEXT1632(auVar442);
              uVar429 = vcmpps_avx512vl(auVar677,auVar683,4);
              auVar562 = vdivps_avx512vl(auVar590,auVar589);
              auVar591._0_4_ =
                   (uint)(bVar29 & 1) * auVar562._0_4_ | !(bool)(bVar29 & 1) * auVar590._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar591._4_4_ = (uint)bVar12 * auVar562._4_4_ | !bVar12 * auVar590._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar591._8_4_ = (uint)bVar12 * auVar562._8_4_ | !bVar12 * auVar590._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar591._12_4_ = (uint)bVar12 * auVar562._12_4_ | !bVar12 * auVar590._12_4_;
              bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
              auVar591._16_4_ = (uint)bVar12 * auVar562._16_4_ | !bVar12 * auVar590._16_4_;
              bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
              auVar591._20_4_ = (uint)bVar12 * auVar562._20_4_ | !bVar12 * auVar590._20_4_;
              bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
              auVar591._24_4_ = (uint)bVar12 * auVar562._24_4_ | !bVar12 * auVar590._24_4_;
              bVar12 = SUB81(uVar430 >> 7,0);
              auVar591._28_4_ = (uint)bVar12 * auVar562._28_4_ | !bVar12 * auVar590._28_4_;
              in_ZMM21 = ZEXT3264(auVar591);
              vandps_avx512vl(auVar677,auVar985);
              auVar677 = vmulps_avx512vl(auVar591,auVar591);
              auVar562 = vmulps_avx512vl(auVar677,auVar677);
              auVar679 = vfmadd213ps_avx512vl(auVar1250,auVar562,auVar1312);
              auVar679 = vfmadd213ps_avx512vl(auVar679,auVar562,auVar1371);
              auVar680 = vfmadd213ps_avx512vl(auVar1481,auVar562,auVar1535);
              auVar679 = vfmadd213ps_avx512vl(auVar679,auVar562,auVar1427);
              auVar680 = vfmadd213ps_avx512vl(auVar680,auVar562,auVar1589);
              auVar680 = vfmadd213ps_avx512vl(auVar680,auVar562,auVar1643);
              auVar562 = vfmadd213ps_avx512vl(auVar680,auVar562,auVar1195);
              uVar431 = vcmpps_avx512vl(auVar674,auVar683,4);
              uVar431 = uVar429 & uVar431;
              auVar677 = vfmadd231ps_avx512vl(auVar562,auVar677,auVar679);
              auVar677 = vmulps_avx512vl(auVar677,auVar591);
              auVar562 = vaddps_avx512vl(auVar677,auVar1697);
              auVar592._0_4_ =
                   (uint)(bVar29 & 1) * auVar562._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar677._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar592._4_4_ = (uint)bVar12 * auVar562._4_4_ | (uint)!bVar12 * auVar677._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar592._8_4_ = (uint)bVar12 * auVar562._8_4_ | (uint)!bVar12 * auVar677._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar592._12_4_ = (uint)bVar12 * auVar562._12_4_ | (uint)!bVar12 * auVar677._12_4_;
              bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
              auVar592._16_4_ = (uint)bVar12 * auVar562._16_4_ | (uint)!bVar12 * auVar677._16_4_;
              bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
              auVar592._20_4_ = (uint)bVar12 * auVar562._20_4_ | (uint)!bVar12 * auVar677._20_4_;
              bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
              auVar592._24_4_ = (uint)bVar12 * auVar562._24_4_ | (uint)!bVar12 * auVar677._24_4_;
              bVar12 = SUB81(uVar430 >> 7,0);
              auVar592._28_4_ = (uint)bVar12 * auVar562._28_4_ | (uint)!bVar12 * auVar677._28_4_;
              auVar677 = vpternlogd_avx512vl(auVar592,auVar678,auVar985,0xf8);
              auVar674 = vpternlogd_avx512vl(auVar674,auVar1749,auVar985,0xec);
              in_ZMM18 = ZEXT3264(auVar674);
              uVar46 = vcmpps_avx512vl(auVar683,auVar674,2);
              auVar674 = vorps_avx512vl(auVar591,auVar1800);
              auVar593._4_4_ = (uint)((byte)(uVar429 >> 1) & 1) * auVar674._4_4_;
              auVar593._0_4_ = (uint)((byte)uVar429 & 1) * auVar674._0_4_;
              auVar593._8_4_ = (uint)((byte)(uVar429 >> 2) & 1) * auVar674._8_4_;
              auVar593._12_4_ = (uint)((byte)(uVar429 >> 3) & 1) * auVar674._12_4_;
              auVar593._16_4_ = (uint)((byte)(uVar429 >> 4) & 1) * auVar674._16_4_;
              auVar593._20_4_ = (uint)((byte)(uVar429 >> 5) & 1) * auVar674._20_4_;
              auVar593._24_4_ = (uint)((byte)(uVar429 >> 6) & 1) * auVar674._24_4_;
              auVar593._28_4_ = (uint)(byte)(uVar429 >> 7) * auVar674._28_4_;
              auVar674 = vaddps_avx512vl(auVar677,auVar589);
              bVar12 = (bool)((byte)uVar47 & 1);
              bVar14 = (bool)((byte)(uVar47 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar47 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar47 >> 3) & 1);
              bVar20 = (bool)((byte)(uVar47 >> 4) & 1);
              bVar22 = (bool)((byte)(uVar47 >> 5) & 1);
              bVar24 = (bool)((byte)(uVar47 >> 6) & 1);
              bVar26 = SUB81(uVar47 >> 7,0);
              bVar29 = (byte)uVar429 | (byte)uVar46;
              auVar678 = vorps_avx512vl(auVar593,auVar1749);
              auVar562 = vmovdqa32_avx512vl(auVar593);
              bVar15 = (bool)(bVar29 >> 1 & 1);
              bVar17 = (bool)(bVar29 >> 2 & 1);
              bVar19 = (bool)(bVar29 >> 3 & 1);
              bVar21 = (bool)(bVar29 >> 4 & 1);
              bVar23 = (bool)(bVar29 >> 5 & 1);
              bVar25 = (bool)(bVar29 >> 6 & 1);
              bVar13 = (bool)((byte)uVar431 & 1);
              auVar594._0_4_ =
                   (uint)bVar13 * ((uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * auVar677._0_4_) |
                   (uint)!bVar13 *
                   ((uint)(bVar29 & 1) * auVar562._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar678._0_4_
                   );
              bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
              auVar594._4_4_ =
                   (uint)bVar12 * ((uint)bVar14 * auVar674._4_4_ | (uint)!bVar14 * auVar677._4_4_) |
                   (uint)!bVar12 * ((uint)bVar15 * auVar562._4_4_ | (uint)!bVar15 * auVar678._4_4_);
              bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
              auVar594._8_4_ =
                   (uint)bVar12 * ((uint)bVar16 * auVar674._8_4_ | (uint)!bVar16 * auVar677._8_4_) |
                   (uint)!bVar12 * ((uint)bVar17 * auVar562._8_4_ | (uint)!bVar17 * auVar678._8_4_);
              bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
              auVar594._12_4_ =
                   (uint)bVar12 * ((uint)bVar18 * auVar674._12_4_ | (uint)!bVar18 * auVar677._12_4_)
                   | (uint)!bVar12 *
                     ((uint)bVar19 * auVar562._12_4_ | (uint)!bVar19 * auVar678._12_4_);
              bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
              auVar594._16_4_ =
                   (uint)bVar12 * ((uint)bVar20 * auVar674._16_4_ | (uint)!bVar20 * auVar677._16_4_)
                   | (uint)!bVar12 *
                     ((uint)bVar21 * auVar562._16_4_ | (uint)!bVar21 * auVar678._16_4_);
              bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
              auVar594._20_4_ =
                   (uint)bVar12 * ((uint)bVar22 * auVar674._20_4_ | (uint)!bVar22 * auVar677._20_4_)
                   | (uint)!bVar12 *
                     ((uint)bVar23 * auVar562._20_4_ | (uint)!bVar23 * auVar678._20_4_);
              bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
              auVar594._24_4_ =
                   (uint)bVar12 * ((uint)bVar24 * auVar674._24_4_ | (uint)!bVar24 * auVar677._24_4_)
                   | (uint)!bVar12 *
                     ((uint)bVar25 * auVar562._24_4_ | (uint)!bVar25 * auVar678._24_4_);
              bVar12 = SUB81(uVar431 >> 7,0);
              auVar594._28_4_ =
                   (uint)bVar12 * ((uint)bVar26 * auVar674._28_4_ | (uint)!bVar26 * auVar677._28_4_)
                   | (uint)!bVar12 *
                     ((uint)(bVar29 >> 7) * auVar562._28_4_ |
                     (uint)!(bool)(bVar29 >> 7) * auVar678._28_4_);
              *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar594;
              ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
              uVar427 = uVar882 + 2;
              iVar424 = uVar882 + 3;
              uVar882 = uVar427;
            } while (iVar424 < (int)uVar425);
          }
          iVar424 = uVar425 - uVar427;
          if (iVar424 != 0 && (int)uVar427 <= (int)uVar425) {
            lVar428 = 0;
            auVar442 = ZEXT816(0) << 0x40;
            auVar955._8_4_ = 0x80000000;
            auVar955._0_8_ = 0x8000000080000000;
            auVar955._12_4_ = 0x80000000;
            auVar1036._8_4_ = 0x40490fdb;
            auVar1036._0_8_ = 0x40490fdb40490fdb;
            auVar1036._12_4_ = 0x40490fdb;
            auVar1120._8_4_ = 0x7fffffff;
            auVar1120._0_8_ = 0x7fffffff7fffffff;
            auVar1120._12_4_ = 0x7fffffff;
            auVar1170._8_4_ = 0x3f800000;
            auVar1170._0_8_ = 0x3f8000003f800000;
            auVar1170._12_4_ = 0x3f800000;
            auVar1225._8_4_ = 0xbc83a25c;
            auVar1225._0_8_ = 0xbc83a25cbc83a25c;
            auVar1225._12_4_ = 0xbc83a25c;
            auVar1290._8_4_ = 0xbd99b01e;
            auVar1290._0_8_ = 0xbd99b01ebd99b01e;
            auVar1290._12_4_ = 0xbd99b01e;
            auVar1351._8_4_ = 0xbe117200;
            auVar1351._0_8_ = 0xbe117200be117200;
            auVar1351._12_4_ = 0xbe117200;
            auVar1407._8_4_ = 0xbeaaaa53;
            auVar1407._0_8_ = 0xbeaaaa53beaaaa53;
            auVar1407._12_4_ = 0xbeaaaa53;
            auVar1461._8_4_ = 0x3b3ac537;
            auVar1461._0_8_ = 0x3b3ac5373b3ac537;
            auVar1461._12_4_ = 0x3b3ac537;
            auVar1515._8_4_ = 0x3d2edd4e;
            auVar1515._0_8_ = 0x3d2edd4e3d2edd4e;
            auVar1515._12_4_ = 0x3d2edd4e;
            auVar1569._8_4_ = 0x3dd9ed24;
            auVar1569._0_8_ = 0x3dd9ed243dd9ed24;
            auVar1569._12_4_ = 0x3dd9ed24;
            auVar1623._8_4_ = 0x3e4cb974;
            auVar1623._0_8_ = 0x3e4cb9743e4cb974;
            auVar1623._12_4_ = 0x3e4cb974;
            auVar1677._8_4_ = 0x3fc90fdb;
            auVar1677._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar1677._12_4_ = 0x3fc90fdb;
            auVar1731._8_4_ = 0x40490fdb;
            auVar1731._0_8_ = 0x40490fdb40490fdb;
            auVar1731._12_4_ = 0x40490fdb;
            auVar1782._8_4_ = 0x3fc90fdb;
            auVar1782._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar1782._12_4_ = 0x3fc90fdb;
            do {
              auVar460 = *(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar428 * 4);
              auVar461 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)ptr1 + lVar428)));
              uVar47 = vcmpps_avx512vl(auVar461,auVar442,4);
              uVar430 = vcmpps_avx512vl(auVar461,auVar442,1);
              auVar52._8_4_ = 0xc0490fdb;
              auVar52._0_8_ = 0xc0490fdbc0490fdb;
              auVar52._12_4_ = 0xc0490fdb;
              auVar519 = vblendmps_avx512vl(auVar1036,auVar52);
              bVar12 = (bool)((byte)uVar430 & 1);
              auVar484._0_4_ = (uint)bVar12 * auVar519._0_4_ | (uint)!bVar12 * in_ZMM18._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar484._4_4_ = (uint)bVar12 * auVar519._4_4_ | (uint)!bVar12 * in_ZMM18._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar484._8_4_ = (uint)bVar12 * auVar519._8_4_ | (uint)!bVar12 * in_ZMM18._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar484._12_4_ = (uint)bVar12 * auVar519._12_4_ | (uint)!bVar12 * in_ZMM18._12_4_;
              in_ZMM18 = ZEXT1664(auVar484);
              uVar430 = vcmpps_avx512vl(auVar460,auVar442,4);
              uVar430 = uVar47 & uVar430;
              auVar519 = vandps_avx512vl(auVar461,auVar955);
              auVar461 = vdivps_avx512vl(auVar461,auVar460);
              auVar472 = vandps_avx512vl(auVar461,auVar1120);
              uVar429 = vcmpps_avx512vl(auVar1170,auVar472,1);
              auVar53._8_4_ = 0xbf800000;
              auVar53._0_8_ = 0xbf800000bf800000;
              auVar53._12_4_ = 0xbf800000;
              auVar464 = vblendmps_avx512vl(auVar472,auVar53);
              bVar29 = (byte)uVar429;
              auVar485._0_4_ =
                   (uint)(bVar29 & 1) * auVar464._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM21._0_4_;
              bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
              auVar485._4_4_ = (uint)bVar12 * auVar464._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
              bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
              auVar485._8_4_ = (uint)bVar12 * auVar464._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
              bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
              auVar485._12_4_ = (uint)bVar12 * auVar464._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
              uVar431 = vcmpps_avx512vl(auVar460,auVar442,1);
              auVar472 = vdivps_avx512vl(auVar485,auVar472);
              auVar486._0_4_ =
                   (uint)(bVar29 & 1) * auVar472._0_4_ | !(bool)(bVar29 & 1) * auVar485._0_4_;
              bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
              auVar486._4_4_ = (uint)bVar12 * auVar472._4_4_ | !bVar12 * auVar485._4_4_;
              bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
              auVar486._8_4_ = (uint)bVar12 * auVar472._8_4_ | !bVar12 * auVar485._8_4_;
              bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
              auVar486._12_4_ = (uint)bVar12 * auVar472._12_4_ | !bVar12 * auVar485._12_4_;
              in_ZMM21 = ZEXT1664(auVar486);
              auVar472 = vmulps_avx512vl(auVar486,auVar486);
              auVar464 = vmulps_avx512vl(auVar472,auVar472);
              auVar465 = vfmadd213ps_avx512vl(auVar1225,auVar464,auVar1290);
              auVar465 = vfmadd213ps_avx512vl(auVar465,auVar464,auVar1351);
              auVar465 = vfmadd213ps_avx512vl(auVar465,auVar464,auVar1407);
              auVar466 = vfmadd213ps_avx512vl(auVar1461,auVar464,auVar1515);
              auVar466 = vfmadd213ps_avx512vl(auVar466,auVar464,auVar1569);
              auVar466 = vfmadd213ps_avx512vl(auVar466,auVar464,auVar1623);
              auVar464 = vfmadd213ps_avx512vl(auVar466,auVar464,auVar1170);
              auVar472 = vfmadd231ps_avx512vl(auVar464,auVar472,auVar465);
              auVar472 = vmulps_avx512vl(auVar472,auVar486);
              auVar464 = vaddps_avx512vl(auVar472,auVar1677);
              auVar487._0_4_ =
                   (uint)(bVar29 & 1) * auVar464._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar472._0_4_;
              bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
              auVar487._4_4_ = (uint)bVar12 * auVar464._4_4_ | (uint)!bVar12 * auVar472._4_4_;
              bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
              auVar487._8_4_ = (uint)bVar12 * auVar464._8_4_ | (uint)!bVar12 * auVar472._8_4_;
              bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
              auVar487._12_4_ = (uint)bVar12 * auVar464._12_4_ | (uint)!bVar12 * auVar472._12_4_;
              auVar461 = vpternlogd_avx512vl(auVar487,auVar461,auVar955,0xf8);
              auVar472 = vaddps_avx512vl(auVar461,auVar484);
              bVar12 = (bool)((byte)uVar431 & 1);
              bVar15 = (bool)((byte)(uVar431 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar431 >> 2) & 1);
              bVar19 = (bool)((byte)(uVar431 >> 3) & 1);
              auVar460 = vpternlogd_avx512vl(auVar460,auVar1731,auVar955,0xec);
              uVar46 = vcmpps_avx512vl(auVar442,auVar460,2);
              auVar460 = vorps_avx512vl(auVar519,auVar1782);
              auVar488._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar460._4_4_;
              auVar488._0_4_ = (uint)((byte)uVar47 & 1) * auVar460._0_4_;
              auVar488._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar460._8_4_;
              auVar488._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar460._12_4_;
              uVar48 = (ushort)uVar47 | (ushort)uVar46;
              auVar460 = vorps_avx512vl(auVar488,auVar1731);
              auVar519 = vmovdqa32_avx512vl(auVar488);
              bVar13 = (bool)((byte)uVar48 & 1);
              bVar16 = (bool)((byte)(uVar48 >> 1) & 1);
              bVar18 = (bool)((byte)(uVar48 >> 2) & 1);
              bVar20 = (bool)((byte)(uVar48 >> 3) & 1);
              bVar14 = (bool)((byte)uVar430 & 1);
              auVar489._0_4_ =
                   (uint)bVar14 * ((uint)bVar12 * auVar472._0_4_ | (uint)!bVar12 * auVar461._0_4_) |
                   (uint)!bVar14 * ((uint)bVar13 * auVar519._0_4_ | (uint)!bVar13 * auVar460._0_4_);
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar489._4_4_ =
                   (uint)bVar12 * ((uint)bVar15 * auVar472._4_4_ | (uint)!bVar15 * auVar461._4_4_) |
                   (uint)!bVar12 * ((uint)bVar16 * auVar519._4_4_ | (uint)!bVar16 * auVar460._4_4_);
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar489._8_4_ =
                   (uint)bVar12 * ((uint)bVar17 * auVar472._8_4_ | (uint)!bVar17 * auVar461._8_4_) |
                   (uint)!bVar12 * ((uint)bVar18 * auVar519._8_4_ | (uint)!bVar18 * auVar460._8_4_);
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar489._12_4_ =
                   (uint)bVar12 * ((uint)bVar19 * auVar472._12_4_ | (uint)!bVar19 * auVar461._12_4_)
                   | (uint)!bVar12 *
                     ((uint)bVar20 * auVar519._12_4_ | (uint)!bVar20 * auVar460._12_4_);
              *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar428 * 4) = auVar489;
              lVar428 = lVar428 + 4;
              iVar424 = iVar424 + -1;
            } while (iVar424 != 0);
          }
        }
      }
      else if (bw == 1) {
        uVar425 = 0;
        if (0xf < (int)uVar427) {
          auVar734 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          auVar1774 = ZEXT1264(ZEXT812(0));
          uVar47 = vcmpps_avx512f(auVar734,auVar1774,1);
          auVar716 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0xc0490fdb));
          bVar12 = (bool)((byte)uVar47 & 1);
          auVar728._0_4_ = (uint)bVar12 * auVar717._0_4_ | (uint)!bVar12 * auVar716._0_4_;
          bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar728._4_4_ = (uint)bVar12 * auVar717._4_4_ | (uint)!bVar12 * auVar716._4_4_;
          bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar728._8_4_ = (uint)bVar12 * auVar717._8_4_ | (uint)!bVar12 * auVar716._8_4_;
          bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar728._12_4_ = (uint)bVar12 * auVar717._12_4_ | (uint)!bVar12 * auVar716._12_4_;
          bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar728._16_4_ = (uint)bVar12 * auVar717._16_4_ | (uint)!bVar12 * auVar716._16_4_;
          bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar728._20_4_ = (uint)bVar12 * auVar717._20_4_ | (uint)!bVar12 * auVar716._20_4_;
          bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar728._24_4_ = (uint)bVar12 * auVar717._24_4_ | (uint)!bVar12 * auVar716._24_4_;
          bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
          auVar728._28_4_ = (uint)bVar12 * auVar717._28_4_ | (uint)!bVar12 * auVar716._28_4_;
          bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
          auVar728._32_4_ = (uint)bVar12 * auVar717._32_4_ | (uint)!bVar12 * auVar716._32_4_;
          bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
          auVar728._36_4_ = (uint)bVar12 * auVar717._36_4_ | (uint)!bVar12 * auVar716._36_4_;
          bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
          auVar728._40_4_ = (uint)bVar12 * auVar717._40_4_ | (uint)!bVar12 * auVar716._40_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
          auVar728._44_4_ = (uint)bVar12 * auVar717._44_4_ | (uint)!bVar12 * auVar716._44_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
          auVar728._48_4_ = (uint)bVar12 * auVar717._48_4_ | (uint)!bVar12 * auVar716._48_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
          auVar728._52_4_ = (uint)bVar12 * auVar717._52_4_ | (uint)!bVar12 * auVar716._52_4_;
          bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
          auVar728._56_4_ = (uint)bVar12 * auVar717._56_4_ | (uint)!bVar12 * auVar716._56_4_;
          bVar12 = SUB81(uVar47 >> 0xf,0);
          auVar728._60_4_ = (uint)bVar12 * auVar717._60_4_ | (uint)!bVar12 * auVar716._60_4_;
          auVar716 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar727._8_4_ = 0x80000000;
          auVar727._0_8_ = 0x8000000080000000;
          auVar727._12_4_ = 0x80000000;
          auVar727._16_4_ = 0x80000000;
          auVar727._20_4_ = 0x80000000;
          auVar727._24_4_ = 0x80000000;
          auVar727._28_4_ = 0x80000000;
          auVar727._32_4_ = 0x80000000;
          auVar727._36_4_ = 0x80000000;
          auVar727._40_4_ = 0x80000000;
          auVar727._44_4_ = 0x80000000;
          auVar727._48_4_ = 0x80000000;
          auVar727._52_4_ = 0x80000000;
          auVar727._56_4_ = 0x80000000;
          auVar727._60_4_ = 0x80000000;
          auVar716 = vpternlogd_avx512f(auVar716,auVar734,auVar727,0xf8);
          iVar424 = 0xf;
          auVar717 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar718 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar725 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar726 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar727 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar729 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          uVar47 = vcmpps_avx512f(auVar734,auVar1774,4);
          auVar730 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          do {
            auVar737 = *(undefined1 (*) [64])ptr;
            auVar852 = vdivps_avx512f(auVar734,auVar737);
            auVar733 = vandps_avx512dq(auVar852,auVar718);
            uVar430 = vcmpps_avx512f(auVar719,auVar733,1);
            auVar332._8_4_ = 0xbf800000;
            auVar332._0_8_ = 0xbf800000bf800000;
            auVar332._12_4_ = 0xbf800000;
            auVar332._16_4_ = 0xbf800000;
            auVar332._20_4_ = 0xbf800000;
            auVar332._24_4_ = 0xbf800000;
            auVar332._28_4_ = 0xbf800000;
            auVar332._32_4_ = 0xbf800000;
            auVar332._36_4_ = 0xbf800000;
            auVar332._40_4_ = 0xbf800000;
            auVar332._44_4_ = 0xbf800000;
            auVar332._48_4_ = 0xbf800000;
            auVar332._52_4_ = 0xbf800000;
            auVar332._56_4_ = 0xbf800000;
            auVar332._60_4_ = 0xbf800000;
            auVar736 = vblendmps_avx512f(auVar733,auVar332);
            bVar12 = (bool)((byte)uVar430 & 1);
            auVar759._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * in_ZMM20._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar759._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * in_ZMM20._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar759._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * in_ZMM20._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar759._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * in_ZMM20._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar759._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * in_ZMM20._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar759._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * in_ZMM20._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar759._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * in_ZMM20._24_4_;
            bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
            auVar759._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * in_ZMM20._28_4_;
            bVar29 = (byte)(uVar430 >> 8);
            bVar12 = (bool)(bVar29 & 1);
            auVar759._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * in_ZMM20._32_4_;
            bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
            auVar759._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * in_ZMM20._36_4_;
            bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
            auVar759._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * in_ZMM20._40_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
            auVar759._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * in_ZMM20._44_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
            auVar759._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * in_ZMM20._48_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
            auVar759._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * in_ZMM20._52_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
            auVar759._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * in_ZMM20._56_4_;
            bVar12 = SUB81(uVar430 >> 0xf,0);
            auVar759._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * in_ZMM20._60_4_;
            auVar733 = vmaxps_avx512f(auVar733,auVar719);
            auVar733 = vdivps_avx512f(auVar759,auVar733);
            in_ZMM20 = vmulps_avx512f(auVar733,auVar733);
            uVar429 = vcmpps_avx512f(auVar737,auVar1774,4);
            in_ZMM21 = vmulps_avx512f(in_ZMM20,in_ZMM20);
            auVar736 = vfmadd213ps_avx512f(auVar720,in_ZMM21,auVar721);
            auVar736 = vfmadd213ps_avx512f(auVar736,in_ZMM21,auVar722);
            auVar731 = vfmadd213ps_avx512f(auVar724,in_ZMM21,auVar725);
            auVar731 = vfmadd213ps_avx512f(auVar731,in_ZMM21,auVar726);
            auVar736 = vfmadd213ps_avx512f(auVar736,in_ZMM21,auVar723);
            auVar731 = vfmadd213ps_avx512f(auVar731,in_ZMM21,auVar727);
            auVar731 = vfmadd213ps_avx512f(auVar731,in_ZMM21,auVar719);
            auVar736 = vfmadd231ps_avx512f(auVar731,in_ZMM20,auVar736);
            uVar431 = vcmpps_avx512f(auVar737,auVar1774,1);
            auVar733 = vmulps_avx512f(auVar736,auVar733);
            auVar736 = vaddps_avx512f(auVar733,auVar729);
            bVar12 = (bool)((byte)uVar430 & 1);
            auVar760._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * auVar733._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar760._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * auVar733._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar760._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * auVar733._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar760._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * auVar733._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar760._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * auVar733._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar760._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * auVar733._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar760._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * auVar733._24_4_;
            bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
            auVar760._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * auVar733._28_4_;
            bVar12 = (bool)(bVar29 & 1);
            auVar760._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * auVar733._32_4_;
            bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
            auVar760._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * auVar733._36_4_;
            bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
            auVar760._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * auVar733._40_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
            auVar760._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * auVar733._44_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
            auVar760._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * auVar733._48_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
            auVar760._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * auVar733._52_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
            auVar760._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * auVar733._56_4_;
            bVar12 = SUB81(uVar430 >> 0xf,0);
            auVar760._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * auVar733._60_4_;
            auVar737 = vpternlogd_avx512f(auVar737,auVar717,auVar730,0xea);
            auVar733 = vpternlogd_avx512f(auVar760,auVar852,auVar717,0xf8);
            uVar430 = vcmpps_avx512f(auVar737,auVar1774,1);
            auVar737 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar736 = vaddps_avx512f(auVar733,auVar728);
            bVar12 = (bool)((byte)uVar431 & 1);
            auVar761._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * auVar733._0_4_;
            bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
            auVar761._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * auVar733._4_4_;
            bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
            auVar761._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * auVar733._8_4_;
            bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
            auVar761._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * auVar733._12_4_;
            bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
            auVar761._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * auVar733._16_4_;
            bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
            auVar761._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * auVar733._20_4_;
            bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
            auVar761._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * auVar733._24_4_;
            bVar12 = (bool)((byte)(uVar431 >> 7) & 1);
            auVar761._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * auVar733._28_4_;
            bVar12 = (bool)((byte)(uVar431 >> 8) & 1);
            auVar761._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * auVar733._32_4_;
            bVar12 = (bool)((byte)(uVar431 >> 9) & 1);
            auVar761._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * auVar733._36_4_;
            bVar12 = (bool)((byte)(uVar431 >> 10) & 1);
            auVar761._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * auVar733._40_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xb) & 1);
            auVar761._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * auVar733._44_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xc) & 1);
            auVar761._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * auVar733._48_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xd) & 1);
            auVar761._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * auVar733._52_4_;
            bVar12 = (bool)((byte)(uVar431 >> 0xe) & 1);
            auVar761._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * auVar733._56_4_;
            bVar12 = SUB81(uVar431 >> 0xf,0);
            auVar761._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * auVar733._60_4_;
            auVar733 = vblendmps_avx512f(auVar716,auVar761);
            bVar12 = (bool)((byte)uVar429 & 1);
            bVar14 = (bool)((byte)(uVar429 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar429 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar429 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar429 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar429 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar429 >> 6) & 1);
            bVar20 = (bool)((byte)(uVar429 >> 7) & 1);
            bVar21 = (bool)((byte)(uVar429 >> 8) & 1);
            bVar22 = (bool)((byte)(uVar429 >> 9) & 1);
            bVar23 = (bool)((byte)(uVar429 >> 10) & 1);
            bVar24 = (bool)((byte)(uVar429 >> 0xb) & 1);
            bVar25 = (bool)((byte)(uVar429 >> 0xc) & 1);
            bVar26 = (bool)((byte)(uVar429 >> 0xd) & 1);
            bVar27 = (bool)((byte)(uVar429 >> 0xe) & 1);
            bVar28 = SUB81(uVar429 >> 0xf,0);
            bVar13 = (bool)((byte)uVar47 & 1);
            auVar562._0_4_ =
                 (uint)bVar13 * ((uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar852._0_4_) |
                 (uint)!bVar13 * (uint)((byte)uVar430 & 1) * auVar737._0_4_;
            bVar12 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar562._4_4_ =
                 (uint)bVar12 * ((uint)bVar14 * auVar733._4_4_ | (uint)!bVar14 * auVar852._4_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 1) & 1) * auVar737._4_4_;
            bVar12 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar562._8_4_ =
                 (uint)bVar12 * ((uint)bVar15 * auVar733._8_4_ | (uint)!bVar15 * auVar852._8_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 2) & 1) * auVar737._8_4_;
            bVar12 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar562._12_4_ =
                 (uint)bVar12 * ((uint)bVar16 * auVar733._12_4_ | (uint)!bVar16 * auVar852._12_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 3) & 1) * auVar737._12_4_;
            bVar12 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar562._16_4_ =
                 (uint)bVar12 * ((uint)bVar17 * auVar733._16_4_ | (uint)!bVar17 * auVar852._16_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 4) & 1) * auVar737._16_4_;
            bVar12 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar562._20_4_ =
                 (uint)bVar12 * ((uint)bVar18 * auVar733._20_4_ | (uint)!bVar18 * auVar852._20_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 5) & 1) * auVar737._20_4_;
            bVar12 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar562._24_4_ =
                 (uint)bVar12 * ((uint)bVar19 * auVar733._24_4_ | (uint)!bVar19 * auVar852._24_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 6) & 1) * auVar737._24_4_;
            bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
            auVar562._28_4_ =
                 (uint)bVar12 * ((uint)bVar20 * auVar733._28_4_ | (uint)!bVar20 * auVar852._28_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 7) & 1) * auVar737._28_4_;
            bVar12 = (bool)((byte)(uVar47 >> 8) & 1);
            auVar762._32_4_ =
                 (uint)bVar12 * ((uint)bVar21 * auVar733._32_4_ | (uint)!bVar21 * auVar852._32_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 8) & 1) * auVar737._32_4_;
            auVar762._0_32_ = auVar562;
            bVar12 = (bool)((byte)(uVar47 >> 9) & 1);
            auVar762._36_4_ =
                 (uint)bVar12 * ((uint)bVar22 * auVar733._36_4_ | (uint)!bVar22 * auVar852._36_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 9) & 1) * auVar737._36_4_;
            bVar12 = (bool)((byte)(uVar47 >> 10) & 1);
            auVar762._40_4_ =
                 (uint)bVar12 * ((uint)bVar23 * auVar733._40_4_ | (uint)!bVar23 * auVar852._40_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 10) & 1) * auVar737._40_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xb) & 1);
            auVar762._44_4_ =
                 (uint)bVar12 * ((uint)bVar24 * auVar733._44_4_ | (uint)!bVar24 * auVar852._44_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 0xb) & 1) * auVar737._44_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xc) & 1);
            auVar762._48_4_ =
                 (uint)bVar12 * ((uint)bVar25 * auVar733._48_4_ | (uint)!bVar25 * auVar852._48_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 0xc) & 1) * auVar737._48_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xd) & 1);
            auVar762._52_4_ =
                 (uint)bVar12 * ((uint)bVar26 * auVar733._52_4_ | (uint)!bVar26 * auVar852._52_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 0xd) & 1) * auVar737._52_4_;
            bVar12 = (bool)((byte)(uVar47 >> 0xe) & 1);
            auVar762._56_4_ =
                 (uint)bVar12 * ((uint)bVar27 * auVar733._56_4_ | (uint)!bVar27 * auVar852._56_4_) |
                 (uint)!bVar12 * (uint)((byte)(uVar430 >> 0xe) & 1) * auVar737._56_4_;
            bVar12 = SUB81(uVar47 >> 0xf,0);
            auVar762._60_4_ =
                 (uint)bVar12 * ((uint)bVar28 * auVar733._60_4_ | (uint)!bVar28 * auVar852._60_4_) |
                 (uint)!bVar12 * (uint)(byte)(uVar430 >> 0xf) * auVar737._60_4_;
            *(undefined1 (*) [64])outptr = auVar762;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar424 = iVar424 + 0x10;
          } while (iVar424 < (int)uVar427);
          uVar425 = uVar427 & 0x7ffffff0;
        }
        if ((int)(uVar425 | 7) < (int)uVar427) {
          fVar890 = *ptr1;
          auVar911._4_4_ = fVar890;
          auVar911._0_4_ = fVar890;
          auVar911._8_4_ = fVar890;
          auVar911._12_4_ = fVar890;
          auVar911._16_4_ = fVar890;
          auVar911._20_4_ = fVar890;
          auVar911._24_4_ = fVar890;
          auVar911._28_4_ = fVar890;
          auVar442 = ZEXT816(0) << 0x40;
          auVar176._8_4_ = 0x80000000;
          auVar176._0_8_ = 0x8000000080000000;
          auVar176._12_4_ = 0x80000000;
          auVar176._16_4_ = 0x80000000;
          auVar176._20_4_ = 0x80000000;
          auVar176._24_4_ = 0x80000000;
          auVar176._28_4_ = 0x80000000;
          vandps_avx512vl(auVar911,auVar176);
          uVar47 = vcmpps_avx512vl(auVar911,ZEXT1632(auVar442),4);
          uVar430 = vcmpps_avx512vl(auVar911,ZEXT1632(auVar442),1);
          auVar674 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
          bVar12 = (bool)((byte)uVar430 & 1);
          auVar595._0_4_ = (uint)bVar12 * auVar674._0_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar595._4_4_ = (uint)bVar12 * auVar674._4_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar595._8_4_ = (uint)bVar12 * auVar674._8_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar595._12_4_ = (uint)bVar12 * auVar674._12_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
          auVar595._16_4_ = (uint)bVar12 * auVar674._16_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
          auVar595._20_4_ = (uint)bVar12 * auVar674._20_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
          auVar595._24_4_ = (uint)bVar12 * auVar674._24_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = SUB81(uVar430 >> 7,0);
          auVar595._28_4_ = (uint)bVar12 * auVar674._28_4_ | (uint)!bVar12 * 0x40490fdb;
          auVar177._8_4_ = 0x3fc90fdb;
          auVar177._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar177._12_4_ = 0x3fc90fdb;
          auVar177._16_4_ = 0x3fc90fdb;
          auVar177._20_4_ = 0x3fc90fdb;
          auVar177._24_4_ = 0x3fc90fdb;
          auVar177._28_4_ = 0x3fc90fdb;
          auVar674 = vorps_avx512vl(auVar562,auVar177);
          auVar596._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar674._4_4_;
          auVar596._0_4_ = (uint)((byte)uVar47 & 1) * auVar674._0_4_;
          auVar596._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar674._8_4_;
          auVar596._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar674._12_4_;
          auVar596._16_4_ = (uint)((byte)(uVar47 >> 4) & 1) * auVar674._16_4_;
          auVar596._20_4_ = (uint)((byte)(uVar47 >> 5) & 1) * auVar674._20_4_;
          auVar596._24_4_ = (uint)((byte)(uVar47 >> 6) & 1) * auVar674._24_4_;
          auVar596._28_4_ = (uint)(byte)(uVar47 >> 7) * auVar674._28_4_;
          auVar1196._8_4_ = 0x80000000;
          auVar1196._0_8_ = 0x8000000080000000;
          auVar1196._12_4_ = 0x80000000;
          auVar1196._16_4_ = 0x80000000;
          auVar1196._20_4_ = 0x80000000;
          auVar1196._24_4_ = 0x80000000;
          auVar1196._28_4_ = 0x80000000;
          auVar1251._8_4_ = 0x7fffffff;
          auVar1251._0_8_ = 0x7fffffff7fffffff;
          auVar1251._12_4_ = 0x7fffffff;
          auVar1251._16_4_ = 0x7fffffff;
          auVar1251._20_4_ = 0x7fffffff;
          auVar1251._24_4_ = 0x7fffffff;
          auVar1251._28_4_ = 0x7fffffff;
          auVar1313._8_4_ = 0x3f800000;
          auVar1313._0_8_ = 0x3f8000003f800000;
          auVar1313._12_4_ = 0x3f800000;
          auVar1313._16_4_ = 0x3f800000;
          auVar1313._20_4_ = 0x3f800000;
          auVar1313._24_4_ = 0x3f800000;
          auVar1313._28_4_ = 0x3f800000;
          auVar1372._8_4_ = 0xbc83a25c;
          auVar1372._0_8_ = 0xbc83a25cbc83a25c;
          auVar1372._12_4_ = 0xbc83a25c;
          auVar1372._16_4_ = 0xbc83a25c;
          auVar1372._20_4_ = 0xbc83a25c;
          auVar1372._24_4_ = 0xbc83a25c;
          auVar1372._28_4_ = 0xbc83a25c;
          auVar1428._8_4_ = 0xbd99b01e;
          auVar1428._0_8_ = 0xbd99b01ebd99b01e;
          auVar1428._12_4_ = 0xbd99b01e;
          auVar1428._16_4_ = 0xbd99b01e;
          auVar1428._20_4_ = 0xbd99b01e;
          auVar1428._24_4_ = 0xbd99b01e;
          auVar1428._28_4_ = 0xbd99b01e;
          auVar1482._8_4_ = 0xbe117200;
          auVar1482._0_8_ = 0xbe117200be117200;
          auVar1482._12_4_ = 0xbe117200;
          auVar1482._16_4_ = 0xbe117200;
          auVar1482._20_4_ = 0xbe117200;
          auVar1482._24_4_ = 0xbe117200;
          auVar1482._28_4_ = 0xbe117200;
          auVar1536._8_4_ = 0xbeaaaa53;
          auVar1536._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1536._12_4_ = 0xbeaaaa53;
          auVar1536._16_4_ = 0xbeaaaa53;
          auVar1536._20_4_ = 0xbeaaaa53;
          auVar1536._24_4_ = 0xbeaaaa53;
          auVar1536._28_4_ = 0xbeaaaa53;
          auVar1590._8_4_ = 0x3b3ac537;
          auVar1590._0_8_ = 0x3b3ac5373b3ac537;
          auVar1590._12_4_ = 0x3b3ac537;
          auVar1590._16_4_ = 0x3b3ac537;
          auVar1590._20_4_ = 0x3b3ac537;
          auVar1590._24_4_ = 0x3b3ac537;
          auVar1590._28_4_ = 0x3b3ac537;
          auVar1644._8_4_ = 0x3d2edd4e;
          auVar1644._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1644._12_4_ = 0x3d2edd4e;
          auVar1644._16_4_ = 0x3d2edd4e;
          auVar1644._20_4_ = 0x3d2edd4e;
          auVar1644._24_4_ = 0x3d2edd4e;
          auVar1644._28_4_ = 0x3d2edd4e;
          auVar1698._8_4_ = 0x3dd9ed24;
          auVar1698._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1698._12_4_ = 0x3dd9ed24;
          auVar1698._16_4_ = 0x3dd9ed24;
          auVar1698._20_4_ = 0x3dd9ed24;
          auVar1698._24_4_ = 0x3dd9ed24;
          auVar1698._28_4_ = 0x3dd9ed24;
          auVar1750._8_4_ = 0x3e4cb974;
          auVar1750._0_8_ = 0x3e4cb9743e4cb974;
          auVar1750._12_4_ = 0x3e4cb974;
          auVar1750._16_4_ = 0x3e4cb974;
          auVar1750._20_4_ = 0x3e4cb974;
          auVar1750._24_4_ = 0x3e4cb974;
          auVar1750._28_4_ = 0x3e4cb974;
          auVar1801._8_4_ = 0x3fc90fdb;
          auVar1801._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1801._12_4_ = 0x3fc90fdb;
          auVar1801._16_4_ = 0x3fc90fdb;
          auVar1801._20_4_ = 0x3fc90fdb;
          auVar1801._24_4_ = 0x3fc90fdb;
          auVar1801._28_4_ = 0x3fc90fdb;
          auVar674 = vbroadcastss_avx512vl(ZEXT416(0x40490fdb));
          auVar677 = vorps_avx512vl(auVar596,auVar674);
          uVar882 = uVar425;
          do {
            auVar678 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
            auVar562 = vdivps_avx512vl(auVar911,auVar678);
            vandps_avx512vl(auVar562,auVar1251);
            uVar430 = vcmpps_avx512vl(auVar1313,auVar562,1);
            auVar178._8_4_ = 0xbf800000;
            auVar178._0_8_ = 0xbf800000bf800000;
            auVar178._12_4_ = 0xbf800000;
            auVar178._16_4_ = 0xbf800000;
            auVar178._20_4_ = 0xbf800000;
            auVar178._24_4_ = 0xbf800000;
            auVar178._28_4_ = 0xbf800000;
            auVar679 = vblendmps_avx512vl(auVar562,auVar178);
            bVar29 = (byte)uVar430;
            auVar597._0_4_ =
                 (uint)(bVar29 & 1) * auVar679._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM21._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar597._4_4_ = (uint)bVar12 * auVar679._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar597._8_4_ = (uint)bVar12 * auVar679._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar597._12_4_ = (uint)bVar12 * auVar679._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar597._16_4_ = (uint)bVar12 * auVar679._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar597._20_4_ = (uint)bVar12 * auVar679._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar597._24_4_ = (uint)bVar12 * auVar679._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar597._28_4_ = (uint)bVar12 * auVar679._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
            auVar679 = vdivps_avx512vl(auVar597,auVar562);
            auVar598._0_4_ =
                 (uint)(bVar29 & 1) * auVar679._0_4_ | !(bool)(bVar29 & 1) * auVar597._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar598._4_4_ = (uint)bVar12 * auVar679._4_4_ | !bVar12 * auVar597._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar598._8_4_ = (uint)bVar12 * auVar679._8_4_ | !bVar12 * auVar597._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar598._12_4_ = (uint)bVar12 * auVar679._12_4_ | !bVar12 * auVar597._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar598._16_4_ = (uint)bVar12 * auVar679._16_4_ | !bVar12 * auVar597._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar598._20_4_ = (uint)bVar12 * auVar679._20_4_ | !bVar12 * auVar597._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar598._24_4_ = (uint)bVar12 * auVar679._24_4_ | !bVar12 * auVar597._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar598._28_4_ = (uint)bVar12 * auVar679._28_4_ | !bVar12 * auVar597._28_4_;
            in_ZMM21 = ZEXT3264(auVar598);
            auVar679 = vmulps_avx512vl(auVar598,auVar598);
            auVar680 = vmulps_avx512vl(auVar679,auVar679);
            auVar685 = ZEXT1632(auVar442);
            uVar429 = vcmpps_avx512vl(auVar678,auVar685,4);
            uVar429 = uVar47 & uVar429;
            auVar683 = vfmadd213ps_avx512vl(auVar1372,auVar680,auVar1428);
            auVar683 = vfmadd213ps_avx512vl(auVar683,auVar680,auVar1482);
            auVar684 = vfmadd213ps_avx512vl(auVar1590,auVar680,auVar1644);
            auVar684 = vfmadd213ps_avx512vl(auVar684,auVar680,auVar1698);
            auVar684 = vfmadd213ps_avx512vl(auVar684,auVar680,auVar1750);
            auVar683 = vfmadd213ps_avx512vl(auVar683,auVar680,auVar1536);
            auVar680 = vfmadd213ps_avx512vl(auVar684,auVar680,auVar1313);
            auVar679 = vfmadd231ps_avx512vl(auVar680,auVar679,auVar683);
            auVar679 = vmulps_avx512vl(auVar679,auVar598);
            uVar431 = vcmpps_avx512vl(auVar678,auVar685,1);
            auVar680 = vaddps_avx512vl(auVar679,auVar1801);
            auVar599._0_4_ =
                 (uint)(bVar29 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar679._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar599._4_4_ = (uint)bVar12 * auVar680._4_4_ | (uint)!bVar12 * auVar679._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar599._8_4_ = (uint)bVar12 * auVar680._8_4_ | (uint)!bVar12 * auVar679._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar599._12_4_ = (uint)bVar12 * auVar680._12_4_ | (uint)!bVar12 * auVar679._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar599._16_4_ = (uint)bVar12 * auVar680._16_4_ | (uint)!bVar12 * auVar679._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar599._20_4_ = (uint)bVar12 * auVar680._20_4_ | (uint)!bVar12 * auVar679._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar599._24_4_ = (uint)bVar12 * auVar680._24_4_ | (uint)!bVar12 * auVar679._24_4_;
            bVar12 = SUB81(uVar430 >> 7,0);
            auVar599._28_4_ = (uint)bVar12 * auVar680._28_4_ | (uint)!bVar12 * auVar679._28_4_;
            auVar562 = vpternlogd_avx512vl(auVar599,auVar562,auVar1196,0xf8);
            auVar678 = vpternlogd_avx512vl(auVar678,auVar674,auVar1196,0xec);
            auVar679 = vaddps_avx512vl(auVar562,auVar595);
            bVar12 = (bool)((byte)uVar431 & 1);
            bVar14 = (bool)((byte)(uVar431 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar431 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar431 >> 3) & 1);
            bVar23 = (bool)((byte)(uVar431 >> 4) & 1);
            bVar26 = (bool)((byte)(uVar431 >> 5) & 1);
            bVar30 = (bool)((byte)(uVar431 >> 6) & 1);
            bVar33 = SUB81(uVar431 >> 7,0);
            uVar46 = vcmpps_avx512vl(auVar685,auVar678,2);
            bVar29 = (byte)uVar47 | (byte)uVar46;
            auVar680 = vpblendmd_avx512vl(auVar677,auVar596);
            bVar15 = (bool)(bVar29 >> 1 & 1);
            bVar18 = (bool)(bVar29 >> 2 & 1);
            bVar21 = (bool)(bVar29 >> 3 & 1);
            bVar24 = (bool)(bVar29 >> 4 & 1);
            bVar27 = (bool)(bVar29 >> 5 & 1);
            bVar31 = (bool)(bVar29 >> 6 & 1);
            bVar13 = (bool)((byte)uVar429 & 1);
            bVar16 = (bool)((byte)(uVar429 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar429 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar429 >> 3) & 1);
            bVar25 = (bool)((byte)(uVar429 >> 4) & 1);
            bVar28 = (bool)((byte)(uVar429 >> 5) & 1);
            bVar32 = (bool)((byte)(uVar429 >> 6) & 1);
            bVar34 = SUB81(uVar429 >> 7,0);
            *(uint *)*(undefined1 (*) [64])outptr =
                 (uint)bVar13 * ((uint)bVar12 * auVar679._0_4_ | (uint)!bVar12 * auVar562._0_4_) |
                 (uint)!bVar13 *
                 ((uint)(bVar29 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar678._0_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
                 (uint)bVar16 * ((uint)bVar14 * auVar679._4_4_ | (uint)!bVar14 * auVar562._4_4_) |
                 (uint)!bVar16 * ((uint)bVar15 * auVar680._4_4_ | (uint)!bVar15 * auVar678._4_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
                 (uint)bVar19 * ((uint)bVar17 * auVar679._8_4_ | (uint)!bVar17 * auVar562._8_4_) |
                 (uint)!bVar19 * ((uint)bVar18 * auVar680._8_4_ | (uint)!bVar18 * auVar678._8_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
                 (uint)bVar22 * ((uint)bVar20 * auVar679._12_4_ | (uint)!bVar20 * auVar562._12_4_) |
                 (uint)!bVar22 * ((uint)bVar21 * auVar680._12_4_ | (uint)!bVar21 * auVar678._12_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x10) =
                 (uint)bVar25 * ((uint)bVar23 * auVar679._16_4_ | (uint)!bVar23 * auVar562._16_4_) |
                 (uint)!bVar25 * ((uint)bVar24 * auVar680._16_4_ | (uint)!bVar24 * auVar678._16_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x14) =
                 (uint)bVar28 * ((uint)bVar26 * auVar679._20_4_ | (uint)!bVar26 * auVar562._20_4_) |
                 (uint)!bVar28 * ((uint)bVar27 * auVar680._20_4_ | (uint)!bVar27 * auVar678._20_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x18) =
                 (uint)bVar32 * ((uint)bVar30 * auVar679._24_4_ | (uint)!bVar30 * auVar562._24_4_) |
                 (uint)!bVar32 * ((uint)bVar31 * auVar680._24_4_ | (uint)!bVar31 * auVar678._24_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x1c) =
                 (uint)bVar34 * ((uint)bVar33 * auVar679._28_4_ | (uint)!bVar33 * auVar562._28_4_) |
                 (uint)!bVar34 *
                 ((uint)(bVar29 >> 7) * auVar680._28_4_ |
                 (uint)!(bool)(bVar29 >> 7) * auVar678._28_4_);
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar425 = uVar882 + 8;
            iVar424 = uVar882 + 0xf;
            uVar882 = uVar425;
          } while (iVar424 < (int)uVar427);
        }
        if ((int)(uVar425 | 3) < (int)uVar427) {
          fVar890 = *ptr1;
          auVar894._4_4_ = fVar890;
          auVar894._0_4_ = fVar890;
          auVar894._8_4_ = fVar890;
          auVar894._12_4_ = fVar890;
          auVar461 = ZEXT816(0) << 0x40;
          uVar47 = vcmpps_avx512vl(auVar894,auVar461,4);
          auVar54._8_4_ = 0x80000000;
          auVar54._0_8_ = 0x8000000080000000;
          auVar54._12_4_ = 0x80000000;
          auVar442 = vandps_avx512vl(auVar894,auVar54);
          uVar430 = vcmpps_avx512vl(auVar894,auVar461,1);
          auVar460 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
          bVar12 = (bool)((byte)uVar430 & 1);
          auVar490._0_4_ = (uint)bVar12 * auVar460._0_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
          auVar490._4_4_ = (uint)bVar12 * auVar460._4_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
          auVar490._8_4_ = (uint)bVar12 * auVar460._8_4_ | (uint)!bVar12 * 0x40490fdb;
          bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
          auVar490._12_4_ = (uint)bVar12 * auVar460._12_4_ | (uint)!bVar12 * 0x40490fdb;
          auVar55._8_4_ = 0x3fc90fdb;
          auVar55._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar55._12_4_ = 0x3fc90fdb;
          auVar442 = vorps_avx512vl(auVar442,auVar55);
          auVar491._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar442._4_4_;
          auVar491._0_4_ = (uint)((byte)uVar47 & 1) * auVar442._0_4_;
          auVar491._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar442._8_4_;
          auVar491._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar442._12_4_;
          auVar1171._8_4_ = 0x80000000;
          auVar1171._0_8_ = 0x8000000080000000;
          auVar1171._12_4_ = 0x80000000;
          auVar1226._8_4_ = 0x7fffffff;
          auVar1226._0_8_ = 0x7fffffff7fffffff;
          auVar1226._12_4_ = 0x7fffffff;
          auVar1291._8_4_ = 0x3f800000;
          auVar1291._0_8_ = 0x3f8000003f800000;
          auVar1291._12_4_ = 0x3f800000;
          auVar1352._8_4_ = 0xbc83a25c;
          auVar1352._0_8_ = 0xbc83a25cbc83a25c;
          auVar1352._12_4_ = 0xbc83a25c;
          auVar1408._8_4_ = 0xbd99b01e;
          auVar1408._0_8_ = 0xbd99b01ebd99b01e;
          auVar1408._12_4_ = 0xbd99b01e;
          auVar1462._8_4_ = 0xbe117200;
          auVar1462._0_8_ = 0xbe117200be117200;
          auVar1462._12_4_ = 0xbe117200;
          auVar1516._8_4_ = 0xbeaaaa53;
          auVar1516._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1516._12_4_ = 0xbeaaaa53;
          auVar1570._8_4_ = 0x3b3ac537;
          auVar1570._0_8_ = 0x3b3ac5373b3ac537;
          auVar1570._12_4_ = 0x3b3ac537;
          auVar1624._8_4_ = 0x3d2edd4e;
          auVar1624._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1624._12_4_ = 0x3d2edd4e;
          auVar1678._8_4_ = 0x3dd9ed24;
          auVar1678._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1678._12_4_ = 0x3dd9ed24;
          auVar1732._8_4_ = 0x3e4cb974;
          auVar1732._0_8_ = 0x3e4cb9743e4cb974;
          auVar1732._12_4_ = 0x3e4cb974;
          auVar1783._8_4_ = 0x3fc90fdb;
          auVar1783._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1783._12_4_ = 0x3fc90fdb;
          lVar428 = 0;
          auVar442 = vbroadcastss_avx512vl(ZEXT416(0x40490fdb));
          auVar460 = vorps_avx512vl(auVar491,auVar442);
          do {
            auVar519 = *(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar428 * 4);
            uVar430 = vcmpps_avx512vl(auVar519,auVar461,4);
            uVar430 = uVar47 & uVar430;
            auVar472 = vdivps_avx512vl(auVar894,auVar519);
            auVar464 = vandps_avx512vl(auVar472,auVar1226);
            uVar429 = vcmpps_avx512vl(auVar1291,auVar464,1);
            auVar56._8_4_ = 0xbf800000;
            auVar56._0_8_ = 0xbf800000bf800000;
            auVar56._12_4_ = 0xbf800000;
            auVar465 = vblendmps_avx512vl(auVar464,auVar56);
            bVar29 = (byte)uVar429;
            auVar492._0_4_ =
                 (uint)(bVar29 & 1) * auVar465._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM21._0_4_;
            bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
            auVar492._4_4_ = (uint)bVar12 * auVar465._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
            bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
            auVar492._8_4_ = (uint)bVar12 * auVar465._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
            bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
            auVar492._12_4_ = (uint)bVar12 * auVar465._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
            uVar431 = vcmpps_avx512vl(auVar519,auVar461,1);
            auVar464 = vdivps_avx512vl(auVar492,auVar464);
            auVar493._0_4_ =
                 (uint)(bVar29 & 1) * auVar464._0_4_ | !(bool)(bVar29 & 1) * auVar492._0_4_;
            bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
            auVar493._4_4_ = (uint)bVar12 * auVar464._4_4_ | !bVar12 * auVar492._4_4_;
            bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
            auVar493._8_4_ = (uint)bVar12 * auVar464._8_4_ | !bVar12 * auVar492._8_4_;
            bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
            auVar493._12_4_ = (uint)bVar12 * auVar464._12_4_ | !bVar12 * auVar492._12_4_;
            in_ZMM21 = ZEXT1664(auVar493);
            auVar464 = vmulps_avx512vl(auVar493,auVar493);
            auVar465 = vmulps_avx512vl(auVar464,auVar464);
            auVar466 = vfmadd213ps_avx512vl(auVar1352,auVar465,auVar1408);
            auVar466 = vfmadd213ps_avx512vl(auVar466,auVar465,auVar1462);
            auVar466 = vfmadd213ps_avx512vl(auVar466,auVar465,auVar1516);
            auVar469 = vfmadd213ps_avx512vl(auVar1570,auVar465,auVar1624);
            auVar469 = vfmadd213ps_avx512vl(auVar469,auVar465,auVar1678);
            auVar469 = vfmadd213ps_avx512vl(auVar469,auVar465,auVar1732);
            auVar465 = vfmadd213ps_avx512vl(auVar469,auVar465,auVar1291);
            auVar464 = vfmadd231ps_avx512vl(auVar465,auVar464,auVar466);
            auVar464 = vmulps_avx512vl(auVar464,auVar493);
            auVar465 = vaddps_avx512vl(auVar464,auVar1783);
            auVar494._0_4_ =
                 (uint)(bVar29 & 1) * auVar465._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar464._0_4_;
            bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
            auVar494._4_4_ = (uint)bVar12 * auVar465._4_4_ | (uint)!bVar12 * auVar464._4_4_;
            bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
            auVar494._8_4_ = (uint)bVar12 * auVar465._8_4_ | (uint)!bVar12 * auVar464._8_4_;
            bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
            auVar494._12_4_ = (uint)bVar12 * auVar465._12_4_ | (uint)!bVar12 * auVar464._12_4_;
            auVar472 = vpternlogd_avx512vl(auVar494,auVar472,auVar1171,0xf8);
            auVar464 = vaddps_avx512vl(auVar472,auVar490);
            bVar12 = (bool)((byte)uVar431 & 1);
            bVar15 = (bool)((byte)(uVar431 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar431 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar431 >> 3) & 1);
            auVar519 = vpternlogd_avx512vl(auVar519,auVar442,auVar1171,0xec);
            uVar46 = vcmpps_avx512vl(auVar461,auVar519,2);
            uVar48 = (ushort)uVar47 | (ushort)uVar46;
            auVar465 = vpblendmd_avx512vl(auVar460,auVar491);
            bVar13 = (bool)((byte)uVar48 & 1);
            bVar16 = (bool)((byte)(uVar48 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar48 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar48 >> 3) & 1);
            bVar14 = (bool)((byte)uVar430 & 1);
            bVar17 = (bool)((byte)(uVar430 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar430 >> 2) & 1);
            bVar23 = (bool)((byte)(uVar430 >> 3) & 1);
            pfVar9 = (float *)((long)*(undefined1 (*) [64])outptr + lVar428 * 4);
            *pfVar9 = (float)((uint)bVar14 *
                              ((uint)bVar12 * auVar464._0_4_ | (uint)!bVar12 * auVar472._0_4_) |
                             (uint)!bVar14 *
                             ((uint)bVar13 * auVar465._0_4_ | (uint)!bVar13 * auVar519._0_4_));
            pfVar9[1] = (float)((uint)bVar17 *
                                ((uint)bVar15 * auVar464._4_4_ | (uint)!bVar15 * auVar472._4_4_) |
                               (uint)!bVar17 *
                               ((uint)bVar16 * auVar465._4_4_ | (uint)!bVar16 * auVar519._4_4_));
            pfVar9[2] = (float)((uint)bVar20 *
                                ((uint)bVar18 * auVar464._8_4_ | (uint)!bVar18 * auVar472._8_4_) |
                               (uint)!bVar20 *
                               ((uint)bVar19 * auVar465._8_4_ | (uint)!bVar19 * auVar519._8_4_));
            pfVar9[3] = (float)((uint)bVar23 *
                                ((uint)bVar21 * auVar464._12_4_ | (uint)!bVar21 * auVar472._12_4_) |
                               (uint)!bVar23 *
                               ((uint)bVar22 * auVar465._12_4_ | (uint)!bVar22 * auVar519._12_4_));
            lVar428 = lVar428 + 4;
          } while ((int)(uVar425 + 3 + (int)lVar428) < (int)uVar427);
        }
      }
      else if (aw == 1) {
        if (iVar424 == 0x10) {
          auVar734 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
          auVar716 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar721._8_4_ = 0x80000000;
          auVar721._0_8_ = 0x8000000080000000;
          auVar721._12_4_ = 0x80000000;
          auVar721._16_4_ = 0x80000000;
          auVar721._20_4_ = 0x80000000;
          auVar721._24_4_ = 0x80000000;
          auVar721._28_4_ = 0x80000000;
          auVar721._32_4_ = 0x80000000;
          auVar721._36_4_ = 0x80000000;
          auVar721._40_4_ = 0x80000000;
          auVar721._44_4_ = 0x80000000;
          auVar721._48_4_ = 0x80000000;
          auVar721._52_4_ = 0x80000000;
          auVar721._56_4_ = 0x80000000;
          auVar721._60_4_ = 0x80000000;
          auVar716 = vpternlogd_avx512f(auVar716,auVar734,auVar721,0xf8);
          auVar1774 = ZEXT864(0);
          auVar717 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          uVar47 = vcmpps_avx512f(auVar716,auVar1774,1);
          auVar716 = vdivps_avx512f(auVar717,auVar734);
          auVar718 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar722._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar718._4_4_;
          auVar722._0_4_ = (uint)((byte)uVar47 & 1) * auVar718._0_4_;
          auVar722._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar718._8_4_;
          auVar722._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar718._12_4_;
          auVar722._16_4_ = (uint)((byte)(uVar47 >> 4) & 1) * auVar718._16_4_;
          auVar722._20_4_ = (uint)((byte)(uVar47 >> 5) & 1) * auVar718._20_4_;
          auVar722._24_4_ = (uint)((byte)(uVar47 >> 6) & 1) * auVar718._24_4_;
          auVar722._28_4_ = (uint)((byte)(uVar47 >> 7) & 1) * auVar718._28_4_;
          auVar722._32_4_ = (uint)((byte)(uVar47 >> 8) & 1) * auVar718._32_4_;
          auVar722._36_4_ = (uint)((byte)(uVar47 >> 9) & 1) * auVar718._36_4_;
          auVar722._40_4_ = (uint)((byte)(uVar47 >> 10) & 1) * auVar718._40_4_;
          auVar722._44_4_ = (uint)((byte)(uVar47 >> 0xb) & 1) * auVar718._44_4_;
          auVar722._48_4_ = (uint)((byte)(uVar47 >> 0xc) & 1) * auVar718._48_4_;
          auVar722._52_4_ = (uint)((byte)(uVar47 >> 0xd) & 1) * auVar718._52_4_;
          auVar722._56_4_ = (uint)((byte)(uVar47 >> 0xe) & 1) * auVar718._56_4_;
          auVar722._60_4_ = (uint)(byte)(uVar47 >> 0xf) * auVar718._60_4_;
          uVar47 = vcmpps_avx512f(auVar734,auVar1774,1);
          uVar430 = vcmpps_avx512f(auVar734,auVar1774,4);
          auVar734 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar718 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar725 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar726 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar727 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar728 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar729 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          auVar730 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          uVar427 = uVar425;
          do {
            auVar852 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
            uVar429 = vcmpps_avx512f(auVar852,auVar1774,1);
            auVar737._8_4_ = 0xc0490fdb;
            auVar737._0_8_ = 0xc0490fdbc0490fdb;
            auVar737._12_4_ = 0xc0490fdb;
            auVar737._16_4_ = 0xc0490fdb;
            auVar737._20_4_ = 0xc0490fdb;
            auVar737._24_4_ = 0xc0490fdb;
            auVar737._28_4_ = 0xc0490fdb;
            auVar737._32_4_ = 0xc0490fdb;
            auVar737._36_4_ = 0xc0490fdb;
            auVar737._40_4_ = 0xc0490fdb;
            auVar737._44_4_ = 0xc0490fdb;
            auVar737._48_4_ = 0xc0490fdb;
            auVar737._52_4_ = 0xc0490fdb;
            auVar737._56_4_ = 0xc0490fdb;
            auVar737._60_4_ = 0xc0490fdb;
            auVar737 = vblendmps_avx512f(auVar718,auVar737);
            bVar12 = (bool)((byte)uVar429 & 1);
            auVar809._0_4_ = (uint)bVar12 * auVar737._0_4_ | (uint)!bVar12 * in_ZMM18._0_4_;
            bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
            auVar809._4_4_ = (uint)bVar12 * auVar737._4_4_ | (uint)!bVar12 * in_ZMM18._4_4_;
            bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
            auVar809._8_4_ = (uint)bVar12 * auVar737._8_4_ | (uint)!bVar12 * in_ZMM18._8_4_;
            bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
            auVar809._12_4_ = (uint)bVar12 * auVar737._12_4_ | (uint)!bVar12 * in_ZMM18._12_4_;
            bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
            auVar809._16_4_ = (uint)bVar12 * auVar737._16_4_ | (uint)!bVar12 * in_ZMM18._16_4_;
            bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
            auVar809._20_4_ = (uint)bVar12 * auVar737._20_4_ | (uint)!bVar12 * in_ZMM18._20_4_;
            bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
            auVar809._24_4_ = (uint)bVar12 * auVar737._24_4_ | (uint)!bVar12 * in_ZMM18._24_4_;
            bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
            auVar809._28_4_ = (uint)bVar12 * auVar737._28_4_ | (uint)!bVar12 * in_ZMM18._28_4_;
            bVar12 = (bool)((byte)(uVar429 >> 8) & 1);
            auVar809._32_4_ = (uint)bVar12 * auVar737._32_4_ | (uint)!bVar12 * in_ZMM18._32_4_;
            bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
            auVar809._36_4_ = (uint)bVar12 * auVar737._36_4_ | (uint)!bVar12 * in_ZMM18._36_4_;
            bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
            auVar809._40_4_ = (uint)bVar12 * auVar737._40_4_ | (uint)!bVar12 * in_ZMM18._40_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
            auVar809._44_4_ = (uint)bVar12 * auVar737._44_4_ | (uint)!bVar12 * in_ZMM18._44_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
            auVar809._48_4_ = (uint)bVar12 * auVar737._48_4_ | (uint)!bVar12 * in_ZMM18._48_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
            auVar809._52_4_ = (uint)bVar12 * auVar737._52_4_ | (uint)!bVar12 * in_ZMM18._52_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
            auVar809._56_4_ = (uint)bVar12 * auVar737._56_4_ | (uint)!bVar12 * in_ZMM18._56_4_;
            bVar12 = SUB81(uVar429 >> 0xf,0);
            auVar809._60_4_ = (uint)bVar12 * auVar737._60_4_ | (uint)!bVar12 * in_ZMM18._60_4_;
            in_ZMM19 = vmulps_avx512f(auVar852,auVar716);
            auVar737 = vandps_avx512dq(in_ZMM19,auVar719);
            uVar429 = vcmpps_avx512f(auVar717,auVar737,1);
            auVar333._8_4_ = 0xbf800000;
            auVar333._0_8_ = 0xbf800000bf800000;
            auVar333._12_4_ = 0xbf800000;
            auVar333._16_4_ = 0xbf800000;
            auVar333._20_4_ = 0xbf800000;
            auVar333._24_4_ = 0xbf800000;
            auVar333._28_4_ = 0xbf800000;
            auVar333._32_4_ = 0xbf800000;
            auVar333._36_4_ = 0xbf800000;
            auVar333._40_4_ = 0xbf800000;
            auVar333._44_4_ = 0xbf800000;
            auVar333._48_4_ = 0xbf800000;
            auVar333._52_4_ = 0xbf800000;
            auVar333._56_4_ = 0xbf800000;
            auVar333._60_4_ = 0xbf800000;
            auVar733 = vblendmps_avx512f(auVar737,auVar333);
            bVar12 = (bool)((byte)uVar429 & 1);
            auVar810._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * in_ZMM21._0_4_;
            bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
            auVar810._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
            bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
            auVar810._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
            bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
            auVar810._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
            bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
            auVar810._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
            bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
            auVar810._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
            bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
            auVar810._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
            bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
            auVar810._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
            bVar29 = (byte)(uVar429 >> 8);
            bVar12 = (bool)(bVar29 & 1);
            auVar810._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * in_ZMM21._32_4_;
            bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
            auVar810._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * in_ZMM21._36_4_;
            bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
            auVar810._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * in_ZMM21._40_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
            auVar810._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * in_ZMM21._44_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
            auVar810._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * in_ZMM21._48_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
            auVar810._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * in_ZMM21._52_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
            auVar810._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * in_ZMM21._56_4_;
            bVar12 = SUB81(uVar429 >> 0xf,0);
            auVar810._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * in_ZMM21._60_4_;
            auVar737 = vmaxps_avx512f(auVar737,auVar717);
            auVar737 = vdivps_avx512f(auVar810,auVar737);
            in_ZMM21 = vmulps_avx512f(auVar737,auVar737);
            in_ZMM22 = vmulps_avx512f(in_ZMM21,in_ZMM21);
            auVar733 = vfmadd213ps_avx512f(auVar720,in_ZMM22,auVar721);
            auVar733 = vfmadd213ps_avx512f(auVar733,in_ZMM22,auVar723);
            auVar736 = vfmadd213ps_avx512f(auVar725,in_ZMM22,auVar726);
            auVar736 = vfmadd213ps_avx512f(auVar736,in_ZMM22,auVar727);
            auVar733 = vfmadd213ps_avx512f(auVar733,in_ZMM22,auVar724);
            auVar736 = vfmadd213ps_avx512f(auVar736,in_ZMM22,auVar728);
            auVar736 = vfmadd213ps_avx512f(auVar736,in_ZMM22,auVar717);
            auVar733 = vfmadd231ps_avx512f(auVar736,in_ZMM21,auVar733);
            auVar737 = vmulps_avx512f(auVar733,auVar737);
            auVar733 = vaddps_avx512f(auVar737,auVar729);
            bVar12 = (bool)((byte)uVar429 & 1);
            auVar811._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar737._0_4_;
            bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
            auVar811._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar737._4_4_;
            bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
            auVar811._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar737._8_4_;
            bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
            auVar811._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar737._12_4_;
            bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
            auVar811._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar737._16_4_;
            bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
            auVar811._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar737._20_4_;
            bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
            auVar811._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar737._24_4_;
            bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
            auVar811._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar737._28_4_;
            bVar12 = (bool)(bVar29 & 1);
            auVar811._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar737._32_4_;
            bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
            auVar811._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar737._36_4_;
            bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
            auVar811._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar737._40_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
            auVar811._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar737._44_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
            auVar811._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar737._48_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
            auVar811._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar737._52_4_;
            bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
            auVar811._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar737._56_4_;
            bVar12 = SUB81(uVar429 >> 0xf,0);
            auVar811._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar737._60_4_;
            auVar737 = vpternlogd_avx512f(auVar811,in_ZMM19,auVar734,0xf8);
            auVar733 = vaddps_avx512f(auVar737,auVar809);
            bVar12 = (bool)((byte)uVar47 & 1);
            bVar14 = (bool)((byte)(uVar47 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar47 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar47 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar47 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar47 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar47 >> 6) & 1);
            bVar20 = (bool)((byte)(uVar47 >> 7) & 1);
            bVar21 = (bool)((byte)(uVar47 >> 8) & 1);
            bVar22 = (bool)((byte)(uVar47 >> 9) & 1);
            bVar23 = (bool)((byte)(uVar47 >> 10) & 1);
            bVar24 = (bool)((byte)(uVar47 >> 0xb) & 1);
            bVar25 = (bool)((byte)(uVar47 >> 0xc) & 1);
            bVar26 = (bool)((byte)(uVar47 >> 0xd) & 1);
            bVar27 = (bool)((byte)(uVar47 >> 0xe) & 1);
            bVar28 = SUB81(uVar47 >> 0xf,0);
            uVar429 = vcmpps_avx512f(auVar852,auVar1774,4);
            auVar852 = vpternlogd_avx512f(auVar852,auVar734,auVar730,0xea);
            bVar13 = (bool)((byte)uVar430 & 1);
            auVar812._0_4_ =
                 (uint)bVar13 * ((uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar737._0_4_) |
                 (uint)!bVar13 * auVar852._0_4_;
            bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
            auVar812._4_4_ =
                 (uint)bVar12 * ((uint)bVar14 * auVar733._4_4_ | (uint)!bVar14 * auVar737._4_4_) |
                 (uint)!bVar12 * auVar852._4_4_;
            bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
            auVar812._8_4_ =
                 (uint)bVar12 * ((uint)bVar15 * auVar733._8_4_ | (uint)!bVar15 * auVar737._8_4_) |
                 (uint)!bVar12 * auVar852._8_4_;
            bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
            auVar812._12_4_ =
                 (uint)bVar12 * ((uint)bVar16 * auVar733._12_4_ | (uint)!bVar16 * auVar737._12_4_) |
                 (uint)!bVar12 * auVar852._12_4_;
            bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
            auVar812._16_4_ =
                 (uint)bVar12 * ((uint)bVar17 * auVar733._16_4_ | (uint)!bVar17 * auVar737._16_4_) |
                 (uint)!bVar12 * auVar852._16_4_;
            bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
            auVar812._20_4_ =
                 (uint)bVar12 * ((uint)bVar18 * auVar733._20_4_ | (uint)!bVar18 * auVar737._20_4_) |
                 (uint)!bVar12 * auVar852._20_4_;
            bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
            auVar812._24_4_ =
                 (uint)bVar12 * ((uint)bVar19 * auVar733._24_4_ | (uint)!bVar19 * auVar737._24_4_) |
                 (uint)!bVar12 * auVar852._24_4_;
            bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
            auVar812._28_4_ =
                 (uint)bVar12 * ((uint)bVar20 * auVar733._28_4_ | (uint)!bVar20 * auVar737._28_4_) |
                 (uint)!bVar12 * auVar852._28_4_;
            bVar12 = (bool)((byte)(uVar430 >> 8) & 1);
            auVar812._32_4_ =
                 (uint)bVar12 * ((uint)bVar21 * auVar733._32_4_ | (uint)!bVar21 * auVar737._32_4_) |
                 (uint)!bVar12 * auVar852._32_4_;
            bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
            auVar812._36_4_ =
                 (uint)bVar12 * ((uint)bVar22 * auVar733._36_4_ | (uint)!bVar22 * auVar737._36_4_) |
                 (uint)!bVar12 * auVar852._36_4_;
            bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
            auVar812._40_4_ =
                 (uint)bVar12 * ((uint)bVar23 * auVar733._40_4_ | (uint)!bVar23 * auVar737._40_4_) |
                 (uint)!bVar12 * auVar852._40_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
            auVar812._44_4_ =
                 (uint)bVar12 * ((uint)bVar24 * auVar733._44_4_ | (uint)!bVar24 * auVar737._44_4_) |
                 (uint)!bVar12 * auVar852._44_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
            auVar812._48_4_ =
                 (uint)bVar12 * ((uint)bVar25 * auVar733._48_4_ | (uint)!bVar25 * auVar737._48_4_) |
                 (uint)!bVar12 * auVar852._48_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
            auVar812._52_4_ =
                 (uint)bVar12 * ((uint)bVar26 * auVar733._52_4_ | (uint)!bVar26 * auVar737._52_4_) |
                 (uint)!bVar12 * auVar852._52_4_;
            bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
            auVar812._56_4_ =
                 (uint)bVar12 * ((uint)bVar27 * auVar733._56_4_ | (uint)!bVar27 * auVar737._56_4_) |
                 (uint)!bVar12 * auVar852._56_4_;
            bVar12 = SUB81(uVar430 >> 0xf,0);
            auVar812._60_4_ =
                 (uint)bVar12 * ((uint)bVar28 * auVar733._60_4_ | (uint)!bVar28 * auVar737._60_4_) |
                 (uint)!bVar12 * auVar852._60_4_;
            auVar737 = vblendmps_avx512f(auVar722,auVar812);
            bVar12 = (bool)((byte)uVar429 & 1);
            bVar13 = (bool)((byte)(uVar429 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar429 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar429 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar429 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar429 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar429 >> 6) & 1);
            bVar19 = (bool)((byte)(uVar429 >> 7) & 1);
            bVar20 = (bool)((byte)(uVar429 >> 8) & 1);
            bVar21 = (bool)((byte)(uVar429 >> 9) & 1);
            bVar22 = (bool)((byte)(uVar429 >> 10) & 1);
            bVar23 = (bool)((byte)(uVar429 >> 0xb) & 1);
            bVar24 = (bool)((byte)(uVar429 >> 0xc) & 1);
            bVar25 = (bool)((byte)(uVar429 >> 0xd) & 1);
            bVar26 = (bool)((byte)(uVar429 >> 0xe) & 1);
            bVar27 = SUB81(uVar429 >> 0xf,0);
            *(uint *)*(undefined1 (*) [32])outptr =
                 (uint)bVar12 * auVar737._0_4_ | !bVar12 * auVar812._0_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 4) =
                 (uint)bVar13 * auVar737._4_4_ | !bVar13 * auVar812._4_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 8) =
                 (uint)bVar14 * auVar737._8_4_ | !bVar14 * auVar812._8_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 0xc) =
                 (uint)bVar15 * auVar737._12_4_ | !bVar15 * auVar812._12_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 0x10) =
                 (uint)bVar16 * auVar737._16_4_ | !bVar16 * auVar812._16_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 0x14) =
                 (uint)bVar17 * auVar737._20_4_ | !bVar17 * auVar812._20_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 0x18) =
                 (uint)bVar18 * auVar737._24_4_ | !bVar18 * auVar812._24_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 0x1c) =
                 (uint)bVar19 * auVar737._28_4_ | !bVar19 * auVar812._28_4_;
            *(uint *)*(undefined1 (*) [32])((long)outptr + 0x20) =
                 (uint)bVar20 * auVar737._32_4_ | !bVar20 * auVar812._32_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 4) =
                 (uint)bVar21 * auVar737._36_4_ | !bVar21 * auVar812._36_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 8) =
                 (uint)bVar22 * auVar737._40_4_ | !bVar22 * auVar812._40_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0xc) =
                 (uint)bVar23 * auVar737._44_4_ | !bVar23 * auVar812._44_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x10) =
                 (uint)bVar24 * auVar737._48_4_ | !bVar24 * auVar812._48_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x14) =
                 (uint)bVar25 * auVar737._52_4_ | !bVar25 * auVar812._52_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x18) =
                 (uint)bVar26 * auVar737._56_4_ | !bVar26 * auVar812._56_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x1c) =
                 (uint)bVar27 * auVar737._60_4_ | !bVar27 * auVar812._60_4_;
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
            uVar427 = uVar427 - 1;
            in_ZMM18 = auVar809;
          } while (uVar427 != 0);
        }
        if (iVar424 == 8) {
          auVar674 = *(undefined1 (*) [32])ptr;
          uVar427 = 0;
          if (1 < (int)uVar425) {
            auVar734 = vinserti64x4_avx512f(ZEXT3264(auVar674),auVar674,1);
            auVar716 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
            auVar723._8_4_ = 0x80000000;
            auVar723._0_8_ = 0x8000000080000000;
            auVar723._12_4_ = 0x80000000;
            auVar723._16_4_ = 0x80000000;
            auVar723._20_4_ = 0x80000000;
            auVar723._24_4_ = 0x80000000;
            auVar723._28_4_ = 0x80000000;
            auVar723._32_4_ = 0x80000000;
            auVar723._36_4_ = 0x80000000;
            auVar723._40_4_ = 0x80000000;
            auVar723._44_4_ = 0x80000000;
            auVar723._48_4_ = 0x80000000;
            auVar723._52_4_ = 0x80000000;
            auVar723._56_4_ = 0x80000000;
            auVar723._60_4_ = 0x80000000;
            auVar716 = vpternlogd_avx512f(auVar716,auVar734,auVar723,0xf8);
            auVar737 = ZEXT1664(ZEXT816(0) << 0x40);
            uVar47 = vcmpps_avx512f(auVar716,auVar737,1);
            auVar716 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar724._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar716._4_4_;
            auVar724._0_4_ = (uint)((byte)uVar47 & 1) * auVar716._0_4_;
            auVar724._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar716._8_4_;
            auVar724._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar716._12_4_;
            auVar724._16_4_ = (uint)((byte)(uVar47 >> 4) & 1) * auVar716._16_4_;
            auVar724._20_4_ = (uint)((byte)(uVar47 >> 5) & 1) * auVar716._20_4_;
            auVar724._24_4_ = (uint)((byte)(uVar47 >> 6) & 1) * auVar716._24_4_;
            auVar724._28_4_ = (uint)((byte)(uVar47 >> 7) & 1) * auVar716._28_4_;
            auVar724._32_4_ = (uint)((byte)(uVar47 >> 8) & 1) * auVar716._32_4_;
            auVar724._36_4_ = (uint)((byte)(uVar47 >> 9) & 1) * auVar716._36_4_;
            auVar724._40_4_ = (uint)((byte)(uVar47 >> 10) & 1) * auVar716._40_4_;
            auVar724._44_4_ = (uint)((byte)(uVar47 >> 0xb) & 1) * auVar716._44_4_;
            auVar724._48_4_ = (uint)((byte)(uVar47 >> 0xc) & 1) * auVar716._48_4_;
            auVar724._52_4_ = (uint)((byte)(uVar47 >> 0xd) & 1) * auVar716._52_4_;
            auVar724._56_4_ = (uint)((byte)(uVar47 >> 0xe) & 1) * auVar716._56_4_;
            auVar724._60_4_ = (uint)(byte)(uVar47 >> 0xf) * auVar716._60_4_;
            auVar716 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar717 = vdivps_avx512f(auVar716,auVar734);
            iVar426 = 1;
            uVar47 = vcmpps_avx512f(auVar734,auVar737,1);
            uVar430 = vcmpps_avx512f(auVar734,auVar737,4);
            auVar718 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar719 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar720 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            auVar721 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
            auVar722 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
            auVar723 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
            auVar725 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
            auVar726 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
            auVar727 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
            auVar728 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
            auVar729 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
            auVar730 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar1774 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
            auVar734 = in_ZMM21;
            do {
              auVar677 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
              auVar678 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
              auVar852 = vinsertf64x4_avx512f(ZEXT3264(auVar677),auVar678,1);
              in_ZMM19 = vmulps_avx512f(auVar852,auVar717);
              uVar429 = vcmpps_avx512f(auVar852,auVar737,1);
              auVar733 = vandps_avx512dq(in_ZMM19,auVar720);
              auVar334._8_4_ = 0xc0490fdb;
              auVar334._0_8_ = 0xc0490fdbc0490fdb;
              auVar334._12_4_ = 0xc0490fdb;
              auVar334._16_4_ = 0xc0490fdb;
              auVar334._20_4_ = 0xc0490fdb;
              auVar334._24_4_ = 0xc0490fdb;
              auVar334._28_4_ = 0xc0490fdb;
              auVar334._32_4_ = 0xc0490fdb;
              auVar334._36_4_ = 0xc0490fdb;
              auVar334._40_4_ = 0xc0490fdb;
              auVar334._44_4_ = 0xc0490fdb;
              auVar334._48_4_ = 0xc0490fdb;
              auVar334._52_4_ = 0xc0490fdb;
              auVar334._56_4_ = 0xc0490fdb;
              auVar334._60_4_ = 0xc0490fdb;
              auVar736 = vblendmps_avx512f(auVar719,auVar334);
              bVar12 = (bool)((byte)uVar429 & 1);
              in_ZMM21._0_4_ = (uint)bVar12 * auVar736._0_4_ | (uint)!bVar12 * auVar734._0_4_;
              bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
              in_ZMM21._4_4_ = (uint)bVar12 * auVar736._4_4_ | (uint)!bVar12 * auVar734._4_4_;
              bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
              in_ZMM21._8_4_ = (uint)bVar12 * auVar736._8_4_ | (uint)!bVar12 * auVar734._8_4_;
              bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
              in_ZMM21._12_4_ = (uint)bVar12 * auVar736._12_4_ | (uint)!bVar12 * auVar734._12_4_;
              bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
              in_ZMM21._16_4_ = (uint)bVar12 * auVar736._16_4_ | (uint)!bVar12 * auVar734._16_4_;
              bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
              in_ZMM21._20_4_ = (uint)bVar12 * auVar736._20_4_ | (uint)!bVar12 * auVar734._20_4_;
              bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
              in_ZMM21._24_4_ = (uint)bVar12 * auVar736._24_4_ | (uint)!bVar12 * auVar734._24_4_;
              bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
              in_ZMM21._28_4_ = (uint)bVar12 * auVar736._28_4_ | (uint)!bVar12 * auVar734._28_4_;
              bVar12 = (bool)((byte)(uVar429 >> 8) & 1);
              in_ZMM21._32_4_ = (uint)bVar12 * auVar736._32_4_ | (uint)!bVar12 * auVar734._32_4_;
              bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
              in_ZMM21._36_4_ = (uint)bVar12 * auVar736._36_4_ | (uint)!bVar12 * auVar734._36_4_;
              bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
              in_ZMM21._40_4_ = (uint)bVar12 * auVar736._40_4_ | (uint)!bVar12 * auVar734._40_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
              in_ZMM21._44_4_ = (uint)bVar12 * auVar736._44_4_ | (uint)!bVar12 * auVar734._44_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
              in_ZMM21._48_4_ = (uint)bVar12 * auVar736._48_4_ | (uint)!bVar12 * auVar734._48_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
              in_ZMM21._52_4_ = (uint)bVar12 * auVar736._52_4_ | (uint)!bVar12 * auVar734._52_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
              in_ZMM21._56_4_ = (uint)bVar12 * auVar736._56_4_ | (uint)!bVar12 * auVar734._56_4_;
              bVar12 = SUB81(uVar429 >> 0xf,0);
              in_ZMM21._60_4_ = (uint)bVar12 * auVar736._60_4_ | (uint)!bVar12 * auVar734._60_4_;
              uVar429 = vcmpps_avx512f(auVar716,auVar733,1);
              auVar335._8_4_ = 0xbf800000;
              auVar335._0_8_ = 0xbf800000bf800000;
              auVar335._12_4_ = 0xbf800000;
              auVar335._16_4_ = 0xbf800000;
              auVar335._20_4_ = 0xbf800000;
              auVar335._24_4_ = 0xbf800000;
              auVar335._28_4_ = 0xbf800000;
              auVar335._32_4_ = 0xbf800000;
              auVar335._36_4_ = 0xbf800000;
              auVar335._40_4_ = 0xbf800000;
              auVar335._44_4_ = 0xbf800000;
              auVar335._48_4_ = 0xbf800000;
              auVar335._52_4_ = 0xbf800000;
              auVar335._56_4_ = 0xbf800000;
              auVar335._60_4_ = 0xbf800000;
              auVar734 = vblendmps_avx512f(auVar733,auVar335);
              bVar12 = (bool)((byte)uVar429 & 1);
              auVar813._0_4_ = (uint)bVar12 * auVar734._0_4_ | (uint)!bVar12 * in_ZMM22._0_4_;
              bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
              auVar813._4_4_ = (uint)bVar12 * auVar734._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
              bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
              auVar813._8_4_ = (uint)bVar12 * auVar734._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
              bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
              auVar813._12_4_ = (uint)bVar12 * auVar734._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
              bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
              auVar813._16_4_ = (uint)bVar12 * auVar734._16_4_ | (uint)!bVar12 * in_ZMM22._16_4_;
              bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
              auVar813._20_4_ = (uint)bVar12 * auVar734._20_4_ | (uint)!bVar12 * in_ZMM22._20_4_;
              bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
              auVar813._24_4_ = (uint)bVar12 * auVar734._24_4_ | (uint)!bVar12 * in_ZMM22._24_4_;
              bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
              auVar813._28_4_ = (uint)bVar12 * auVar734._28_4_ | (uint)!bVar12 * in_ZMM22._28_4_;
              bVar29 = (byte)(uVar429 >> 8);
              bVar12 = (bool)(bVar29 & 1);
              auVar813._32_4_ = (uint)bVar12 * auVar734._32_4_ | (uint)!bVar12 * in_ZMM22._32_4_;
              bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
              auVar813._36_4_ = (uint)bVar12 * auVar734._36_4_ | (uint)!bVar12 * in_ZMM22._36_4_;
              bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
              auVar813._40_4_ = (uint)bVar12 * auVar734._40_4_ | (uint)!bVar12 * in_ZMM22._40_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
              auVar813._44_4_ = (uint)bVar12 * auVar734._44_4_ | (uint)!bVar12 * in_ZMM22._44_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
              auVar813._48_4_ = (uint)bVar12 * auVar734._48_4_ | (uint)!bVar12 * in_ZMM22._48_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
              auVar813._52_4_ = (uint)bVar12 * auVar734._52_4_ | (uint)!bVar12 * in_ZMM22._52_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
              auVar813._56_4_ = (uint)bVar12 * auVar734._56_4_ | (uint)!bVar12 * in_ZMM22._56_4_;
              bVar12 = SUB81(uVar429 >> 0xf,0);
              auVar813._60_4_ = (uint)bVar12 * auVar734._60_4_ | (uint)!bVar12 * in_ZMM22._60_4_;
              auVar734 = vmaxps_avx512f(auVar733,auVar716);
              auVar734 = vdivps_avx512f(auVar813,auVar734);
              in_ZMM22 = vmulps_avx512f(auVar734,auVar734);
              auVar733 = vmulps_avx512f(in_ZMM22,in_ZMM22);
              auVar736 = vfmadd213ps_avx512f(auVar721,auVar733,auVar722);
              auVar736 = vfmadd213ps_avx512f(auVar736,auVar733,auVar723);
              auVar731 = vfmadd213ps_avx512f(auVar726,auVar733,auVar727);
              auVar731 = vfmadd213ps_avx512f(auVar731,auVar733,auVar728);
              auVar731 = vfmadd213ps_avx512f(auVar731,auVar733,auVar729);
              auVar736 = vfmadd213ps_avx512f(auVar736,auVar733,auVar725);
              auVar733 = vfmadd213ps_avx512f(auVar731,auVar733,auVar716);
              auVar733 = vfmadd231ps_avx512f(auVar733,in_ZMM22,auVar736);
              auVar734 = vmulps_avx512f(auVar733,auVar734);
              uVar431 = vcmpps_avx512f(auVar852,auVar737,4);
              auVar733 = vaddps_avx512f(auVar734,auVar730);
              bVar12 = (bool)((byte)uVar429 & 1);
              auVar814._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar734._0_4_;
              bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
              auVar814._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar734._4_4_;
              bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
              auVar814._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar734._8_4_;
              bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
              auVar814._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar734._12_4_;
              bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
              auVar814._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar734._16_4_;
              bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
              auVar814._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar734._20_4_;
              bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
              auVar814._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar734._24_4_;
              bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
              auVar814._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar734._28_4_;
              bVar12 = (bool)(bVar29 & 1);
              auVar814._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar734._32_4_;
              bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
              auVar814._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar734._36_4_;
              bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
              auVar814._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar734._40_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
              auVar814._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar734._44_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
              auVar814._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar734._48_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
              auVar814._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar734._52_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
              auVar814._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar734._56_4_;
              bVar12 = SUB81(uVar429 >> 0xf,0);
              auVar814._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar734._60_4_;
              auVar734 = vpternlogd_avx512f(auVar814,in_ZMM19,auVar718,0xf8);
              auVar733 = vaddps_avx512f(auVar734,in_ZMM21);
              bVar12 = (bool)((byte)uVar47 & 1);
              bVar14 = (bool)((byte)(uVar47 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar47 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar47 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar47 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar47 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar47 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar47 >> 7) & 1);
              bVar21 = (bool)((byte)(uVar47 >> 8) & 1);
              bVar22 = (bool)((byte)(uVar47 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar47 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar47 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar47 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar47 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar47 >> 0xe) & 1);
              bVar28 = SUB81(uVar47 >> 0xf,0);
              auVar852 = vpternlogd_avx512f(auVar852,auVar718,auVar1774,0xea);
              bVar13 = (bool)((byte)uVar430 & 1);
              auVar815._0_4_ =
                   (uint)bVar13 * ((uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar734._0_4_) |
                   (uint)!bVar13 * auVar852._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar815._4_4_ =
                   (uint)bVar12 * ((uint)bVar14 * auVar733._4_4_ | (uint)!bVar14 * auVar734._4_4_) |
                   (uint)!bVar12 * auVar852._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar815._8_4_ =
                   (uint)bVar12 * ((uint)bVar15 * auVar733._8_4_ | (uint)!bVar15 * auVar734._8_4_) |
                   (uint)!bVar12 * auVar852._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar815._12_4_ =
                   (uint)bVar12 * ((uint)bVar16 * auVar733._12_4_ | (uint)!bVar16 * auVar734._12_4_)
                   | (uint)!bVar12 * auVar852._12_4_;
              bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
              auVar815._16_4_ =
                   (uint)bVar12 * ((uint)bVar17 * auVar733._16_4_ | (uint)!bVar17 * auVar734._16_4_)
                   | (uint)!bVar12 * auVar852._16_4_;
              bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
              auVar815._20_4_ =
                   (uint)bVar12 * ((uint)bVar18 * auVar733._20_4_ | (uint)!bVar18 * auVar734._20_4_)
                   | (uint)!bVar12 * auVar852._20_4_;
              bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
              auVar815._24_4_ =
                   (uint)bVar12 * ((uint)bVar19 * auVar733._24_4_ | (uint)!bVar19 * auVar734._24_4_)
                   | (uint)!bVar12 * auVar852._24_4_;
              bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
              auVar815._28_4_ =
                   (uint)bVar12 * ((uint)bVar20 * auVar733._28_4_ | (uint)!bVar20 * auVar734._28_4_)
                   | (uint)!bVar12 * auVar852._28_4_;
              bVar12 = (bool)((byte)(uVar430 >> 8) & 1);
              auVar815._32_4_ =
                   (uint)bVar12 * ((uint)bVar21 * auVar733._32_4_ | (uint)!bVar21 * auVar734._32_4_)
                   | (uint)!bVar12 * auVar852._32_4_;
              bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
              auVar815._36_4_ =
                   (uint)bVar12 * ((uint)bVar22 * auVar733._36_4_ | (uint)!bVar22 * auVar734._36_4_)
                   | (uint)!bVar12 * auVar852._36_4_;
              bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
              auVar815._40_4_ =
                   (uint)bVar12 * ((uint)bVar23 * auVar733._40_4_ | (uint)!bVar23 * auVar734._40_4_)
                   | (uint)!bVar12 * auVar852._40_4_;
              bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
              auVar815._44_4_ =
                   (uint)bVar12 * ((uint)bVar24 * auVar733._44_4_ | (uint)!bVar24 * auVar734._44_4_)
                   | (uint)!bVar12 * auVar852._44_4_;
              bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
              auVar815._48_4_ =
                   (uint)bVar12 * ((uint)bVar25 * auVar733._48_4_ | (uint)!bVar25 * auVar734._48_4_)
                   | (uint)!bVar12 * auVar852._48_4_;
              bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
              auVar815._52_4_ =
                   (uint)bVar12 * ((uint)bVar26 * auVar733._52_4_ | (uint)!bVar26 * auVar734._52_4_)
                   | (uint)!bVar12 * auVar852._52_4_;
              bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
              auVar815._56_4_ =
                   (uint)bVar12 * ((uint)bVar27 * auVar733._56_4_ | (uint)!bVar27 * auVar734._56_4_)
                   | (uint)!bVar12 * auVar852._56_4_;
              bVar12 = SUB81(uVar430 >> 0xf,0);
              auVar815._60_4_ =
                   (uint)bVar12 * ((uint)bVar28 * auVar733._60_4_ | (uint)!bVar28 * auVar734._60_4_)
                   | (uint)!bVar12 * auVar852._60_4_;
              auVar734 = vblendmps_avx512f(auVar724,auVar815);
              bVar12 = (bool)((byte)uVar431 & 1);
              bVar13 = (bool)((byte)(uVar431 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar431 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar431 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar431 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar431 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar431 >> 6) & 1);
              bVar19 = (bool)((byte)(uVar431 >> 7) & 1);
              bVar20 = (bool)((byte)(uVar431 >> 8) & 1);
              bVar21 = (bool)((byte)(uVar431 >> 9) & 1);
              bVar22 = (bool)((byte)(uVar431 >> 10) & 1);
              bVar23 = (bool)((byte)(uVar431 >> 0xb) & 1);
              bVar24 = (bool)((byte)(uVar431 >> 0xc) & 1);
              bVar25 = (bool)((byte)(uVar431 >> 0xd) & 1);
              bVar26 = (bool)((byte)(uVar431 >> 0xe) & 1);
              bVar27 = SUB81(uVar431 >> 0xf,0);
              *(uint *)*(undefined1 (*) [32])outptr =
                   (uint)bVar12 * auVar734._0_4_ | !bVar12 * auVar815._0_4_;
              *(uint *)((long)*(undefined1 (*) [32])outptr + 4) =
                   (uint)bVar13 * auVar734._4_4_ | !bVar13 * auVar815._4_4_;
              *(uint *)((long)*(undefined1 (*) [32])outptr + 8) =
                   (uint)bVar14 * auVar734._8_4_ | !bVar14 * auVar815._8_4_;
              *(uint *)((long)*(undefined1 (*) [32])outptr + 0xc) =
                   (uint)bVar15 * auVar734._12_4_ | !bVar15 * auVar815._12_4_;
              *(uint *)((long)*(undefined1 (*) [32])outptr + 0x10) =
                   (uint)bVar16 * auVar734._16_4_ | !bVar16 * auVar815._16_4_;
              *(uint *)((long)*(undefined1 (*) [32])outptr + 0x14) =
                   (uint)bVar17 * auVar734._20_4_ | !bVar17 * auVar815._20_4_;
              *(uint *)((long)*(undefined1 (*) [32])outptr + 0x18) =
                   (uint)bVar18 * auVar734._24_4_ | !bVar18 * auVar815._24_4_;
              *(uint *)((long)*(undefined1 (*) [32])outptr + 0x1c) =
                   (uint)bVar19 * auVar734._28_4_ | !bVar19 * auVar815._28_4_;
              *(uint *)*(undefined1 (*) [32])((long)outptr + 0x20) =
                   (uint)bVar20 * auVar734._32_4_ | !bVar20 * auVar815._32_4_;
              *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 4) =
                   (uint)bVar21 * auVar734._36_4_ | !bVar21 * auVar815._36_4_;
              *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 8) =
                   (uint)bVar22 * auVar734._40_4_ | !bVar22 * auVar815._40_4_;
              *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0xc) =
                   (uint)bVar23 * auVar734._44_4_ | !bVar23 * auVar815._44_4_;
              *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x10) =
                   (uint)bVar24 * auVar734._48_4_ | !bVar24 * auVar815._48_4_;
              *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x14) =
                   (uint)bVar25 * auVar734._52_4_ | !bVar25 * auVar815._52_4_;
              *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x18) =
                   (uint)bVar26 * auVar734._56_4_ | !bVar26 * auVar815._56_4_;
              *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x1c) =
                   (uint)bVar27 * auVar734._60_4_ | !bVar27 * auVar815._60_4_;
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)outptr + 0x40);
              iVar426 = iVar426 + 2;
              auVar734 = in_ZMM21;
            } while (iVar426 < (int)uVar425);
            uVar427 = uVar425 & 0x7ffffffe;
          }
          iVar426 = uVar425 - uVar427;
          if (iVar426 != 0 && (int)uVar427 <= (int)uVar425) {
            auVar1005._8_4_ = 0x40490fdb;
            auVar1005._0_8_ = 0x40490fdb40490fdb;
            auVar1005._12_4_ = 0x40490fdb;
            auVar1005._16_4_ = 0x40490fdb;
            auVar1005._20_4_ = 0x40490fdb;
            auVar1005._24_4_ = 0x40490fdb;
            auVar1005._28_4_ = 0x40490fdb;
            auVar1262._8_4_ = 0x80000000;
            auVar1262._0_8_ = 0x8000000080000000;
            auVar1262._12_4_ = 0x80000000;
            auVar1262._16_4_ = 0x80000000;
            auVar1262._20_4_ = 0x80000000;
            auVar1262._24_4_ = 0x80000000;
            auVar1262._28_4_ = 0x80000000;
            auVar678 = vpternlogd_avx512vl(auVar1262,auVar674,auVar1005,0xea);
            auVar1065._8_4_ = 0x3f800000;
            auVar1065._0_8_ = 0x3f8000003f800000;
            auVar1065._12_4_ = 0x3f800000;
            auVar1065._16_4_ = 0x3f800000;
            auVar1065._20_4_ = 0x3f800000;
            auVar1065._24_4_ = 0x3f800000;
            auVar1065._28_4_ = 0x3f800000;
            auVar677 = vdivps_avx(auVar1065,auVar674);
            auVar442 = ZEXT816(0) << 0x40;
            uVar46 = vcmpps_avx512vl(ZEXT1632(auVar442),auVar678,2);
            uVar47 = vcmpps_avx512vl(auVar674,ZEXT1632(auVar442),1);
            auVar1263._8_4_ = 0x80000000;
            auVar1263._0_8_ = 0x8000000080000000;
            auVar1263._12_4_ = 0x80000000;
            auVar1263._16_4_ = 0x80000000;
            auVar1263._20_4_ = 0x80000000;
            auVar1263._24_4_ = 0x80000000;
            auVar1263._28_4_ = 0x80000000;
            auVar1324._8_4_ = 0x40490fdb;
            auVar1324._0_8_ = 0x40490fdb40490fdb;
            auVar1324._12_4_ = 0x40490fdb;
            auVar1324._16_4_ = 0x40490fdb;
            auVar1324._20_4_ = 0x40490fdb;
            auVar1324._24_4_ = 0x40490fdb;
            auVar1324._28_4_ = 0x40490fdb;
            auVar1382._8_4_ = 0x7fffffff;
            auVar1382._0_8_ = 0x7fffffff7fffffff;
            auVar1382._12_4_ = 0x7fffffff;
            auVar1382._16_4_ = 0x7fffffff;
            auVar1382._20_4_ = 0x7fffffff;
            auVar1382._24_4_ = 0x7fffffff;
            auVar1382._28_4_ = 0x7fffffff;
            auVar1438._8_4_ = 0xbc83a25c;
            auVar1438._0_8_ = 0xbc83a25cbc83a25c;
            auVar1438._12_4_ = 0xbc83a25c;
            auVar1438._16_4_ = 0xbc83a25c;
            auVar1438._20_4_ = 0xbc83a25c;
            auVar1438._24_4_ = 0xbc83a25c;
            auVar1438._28_4_ = 0xbc83a25c;
            auVar1492._8_4_ = 0xbd99b01e;
            auVar1492._0_8_ = 0xbd99b01ebd99b01e;
            auVar1492._12_4_ = 0xbd99b01e;
            auVar1492._16_4_ = 0xbd99b01e;
            auVar1492._20_4_ = 0xbd99b01e;
            auVar1492._24_4_ = 0xbd99b01e;
            auVar1492._28_4_ = 0xbd99b01e;
            auVar1546._8_4_ = 0xbe117200;
            auVar1546._0_8_ = 0xbe117200be117200;
            auVar1546._12_4_ = 0xbe117200;
            auVar1546._16_4_ = 0xbe117200;
            auVar1546._20_4_ = 0xbe117200;
            auVar1546._24_4_ = 0xbe117200;
            auVar1546._28_4_ = 0xbe117200;
            auVar1600._8_4_ = 0xbeaaaa53;
            auVar1600._0_8_ = 0xbeaaaa53beaaaa53;
            auVar1600._12_4_ = 0xbeaaaa53;
            auVar1600._16_4_ = 0xbeaaaa53;
            auVar1600._20_4_ = 0xbeaaaa53;
            auVar1600._24_4_ = 0xbeaaaa53;
            auVar1600._28_4_ = 0xbeaaaa53;
            auVar1654._8_4_ = 0x3b3ac537;
            auVar1654._0_8_ = 0x3b3ac5373b3ac537;
            auVar1654._12_4_ = 0x3b3ac537;
            auVar1654._16_4_ = 0x3b3ac537;
            auVar1654._20_4_ = 0x3b3ac537;
            auVar1654._24_4_ = 0x3b3ac537;
            auVar1654._28_4_ = 0x3b3ac537;
            auVar1708._8_4_ = 0x3d2edd4e;
            auVar1708._0_8_ = 0x3d2edd4e3d2edd4e;
            auVar1708._12_4_ = 0x3d2edd4e;
            auVar1708._16_4_ = 0x3d2edd4e;
            auVar1708._20_4_ = 0x3d2edd4e;
            auVar1708._24_4_ = 0x3d2edd4e;
            auVar1708._28_4_ = 0x3d2edd4e;
            auVar1759._8_4_ = 0x3dd9ed24;
            auVar1759._0_8_ = 0x3dd9ed243dd9ed24;
            auVar1759._12_4_ = 0x3dd9ed24;
            auVar1759._16_4_ = 0x3dd9ed24;
            auVar1759._20_4_ = 0x3dd9ed24;
            auVar1759._24_4_ = 0x3dd9ed24;
            auVar1759._28_4_ = 0x3dd9ed24;
            auVar1810._8_4_ = 0x3e4cb974;
            auVar1810._0_8_ = 0x3e4cb9743e4cb974;
            auVar1810._12_4_ = 0x3e4cb974;
            auVar1810._16_4_ = 0x3e4cb974;
            auVar1810._20_4_ = 0x3e4cb974;
            auVar1810._24_4_ = 0x3e4cb974;
            auVar1810._28_4_ = 0x3e4cb974;
            auVar678 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
            auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
            do {
              auVar679 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
              auVar680 = vmulps_avx512vl(auVar679,auVar677);
              auVar701 = ZEXT1632(auVar442);
              uVar430 = vcmpps_avx512vl(auVar679,auVar701,1);
              vandps_avx512vl(auVar680,auVar1382);
              auVar179._8_4_ = 0xc0490fdb;
              auVar179._0_8_ = 0xc0490fdbc0490fdb;
              auVar179._12_4_ = 0xc0490fdb;
              auVar179._16_4_ = 0xc0490fdb;
              auVar179._20_4_ = 0xc0490fdb;
              auVar179._24_4_ = 0xc0490fdb;
              auVar179._28_4_ = 0xc0490fdb;
              auVar683 = vblendmps_avx512vl(auVar1324,auVar179);
              bVar12 = (bool)((byte)uVar430 & 1);
              auVar637._0_4_ = (uint)bVar12 * auVar683._0_4_ | (uint)!bVar12 * in_ZMM21._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar637._4_4_ = (uint)bVar12 * auVar683._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar637._8_4_ = (uint)bVar12 * auVar683._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar637._12_4_ = (uint)bVar12 * auVar683._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
              bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
              auVar637._16_4_ = (uint)bVar12 * auVar683._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
              bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
              auVar637._20_4_ = (uint)bVar12 * auVar683._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
              bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
              auVar637._24_4_ = (uint)bVar12 * auVar683._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
              bVar12 = SUB81(uVar430 >> 7,0);
              auVar637._28_4_ = (uint)bVar12 * auVar683._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
              in_ZMM21 = ZEXT3264(auVar637);
              uVar430 = vcmpps_avx512vl(auVar1065,auVar680,1);
              auVar180._8_4_ = 0xbf800000;
              auVar180._0_8_ = 0xbf800000bf800000;
              auVar180._12_4_ = 0xbf800000;
              auVar180._16_4_ = 0xbf800000;
              auVar180._20_4_ = 0xbf800000;
              auVar180._24_4_ = 0xbf800000;
              auVar180._28_4_ = 0xbf800000;
              auVar683 = vblendmps_avx512vl(auVar680,auVar180);
              bVar29 = (byte)uVar430;
              auVar638._0_4_ =
                   (uint)(bVar29 & 1) * auVar683._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM22._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar638._4_4_ = (uint)bVar12 * auVar683._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar638._8_4_ = (uint)bVar12 * auVar683._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar638._12_4_ = (uint)bVar12 * auVar683._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
              bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
              auVar638._16_4_ = (uint)bVar12 * auVar683._16_4_ | (uint)!bVar12 * in_ZMM22._16_4_;
              bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
              auVar638._20_4_ = (uint)bVar12 * auVar683._20_4_ | (uint)!bVar12 * in_ZMM22._20_4_;
              bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
              auVar638._24_4_ = (uint)bVar12 * auVar683._24_4_ | (uint)!bVar12 * in_ZMM22._24_4_;
              bVar12 = SUB81(uVar430 >> 7,0);
              auVar638._28_4_ = (uint)bVar12 * auVar683._28_4_ | (uint)!bVar12 * in_ZMM22._28_4_;
              auVar683 = vdivps_avx512vl(auVar638,auVar680);
              auVar639._0_4_ =
                   (uint)(bVar29 & 1) * auVar683._0_4_ | !(bool)(bVar29 & 1) * auVar638._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar639._4_4_ = (uint)bVar12 * auVar683._4_4_ | !bVar12 * auVar638._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar639._8_4_ = (uint)bVar12 * auVar683._8_4_ | !bVar12 * auVar638._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar639._12_4_ = (uint)bVar12 * auVar683._12_4_ | !bVar12 * auVar638._12_4_;
              bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
              auVar639._16_4_ = (uint)bVar12 * auVar683._16_4_ | !bVar12 * auVar638._16_4_;
              bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
              auVar639._20_4_ = (uint)bVar12 * auVar683._20_4_ | !bVar12 * auVar638._20_4_;
              bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
              auVar639._24_4_ = (uint)bVar12 * auVar683._24_4_ | !bVar12 * auVar638._24_4_;
              bVar12 = SUB81(uVar430 >> 7,0);
              auVar639._28_4_ = (uint)bVar12 * auVar683._28_4_ | !bVar12 * auVar638._28_4_;
              in_ZMM22 = ZEXT3264(auVar639);
              uVar429 = vcmpps_avx512vl(auVar679,auVar701,4);
              auVar683 = vmulps_avx512vl(auVar639,auVar639);
              auVar684 = vmulps_avx512vl(auVar683,auVar683);
              vandps_avx512vl(auVar679,auVar1263);
              auVar679 = vfmadd213ps_avx512vl(auVar1438,auVar684,auVar1492);
              auVar679 = vfmadd213ps_avx512vl(auVar679,auVar684,auVar1546);
              auVar685 = vfmadd213ps_avx512vl(auVar1654,auVar684,auVar1708);
              auVar685 = vfmadd213ps_avx512vl(auVar685,auVar684,auVar1759);
              auVar685 = vfmadd213ps_avx512vl(auVar685,auVar684,auVar1810);
              auVar679 = vfmadd213ps_avx512vl(auVar679,auVar684,auVar1600);
              auVar685 = vfmadd213ps_avx512vl(auVar685,auVar684,auVar1065);
              auVar679 = vfmadd231ps_avx512vl(auVar685,auVar683,auVar679);
              auVar679 = vmulps_avx512vl(auVar679,auVar639);
              uVar431 = vcmpps_avx512vl(auVar674,auVar701,4);
              uVar431 = uVar429 & uVar431;
              auVar683 = vaddps_avx512vl(auVar679,auVar678);
              auVar640._0_4_ =
                   (uint)(bVar29 & 1) * auVar683._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar679._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar640._4_4_ = (uint)bVar12 * auVar683._4_4_ | (uint)!bVar12 * auVar679._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar640._8_4_ = (uint)bVar12 * auVar683._8_4_ | (uint)!bVar12 * auVar679._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar640._12_4_ = (uint)bVar12 * auVar683._12_4_ | (uint)!bVar12 * auVar679._12_4_;
              bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
              auVar640._16_4_ = (uint)bVar12 * auVar683._16_4_ | (uint)!bVar12 * auVar679._16_4_;
              bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
              auVar640._20_4_ = (uint)bVar12 * auVar683._20_4_ | (uint)!bVar12 * auVar679._20_4_;
              bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
              auVar640._24_4_ = (uint)bVar12 * auVar683._24_4_ | (uint)!bVar12 * auVar679._24_4_;
              bVar12 = SUB81(uVar430 >> 7,0);
              auVar640._28_4_ = (uint)bVar12 * auVar683._28_4_ | (uint)!bVar12 * auVar679._28_4_;
              auVar679 = vpternlogd_avx512vl(auVar640,auVar680,auVar1263,0xf8);
              auVar680 = vorps_avx512vl(auVar684,auVar562);
              auVar641._4_4_ = (uint)((byte)(uVar429 >> 1) & 1) * auVar680._4_4_;
              auVar641._0_4_ = (uint)((byte)uVar429 & 1) * auVar680._0_4_;
              auVar641._8_4_ = (uint)((byte)(uVar429 >> 2) & 1) * auVar680._8_4_;
              auVar641._12_4_ = (uint)((byte)(uVar429 >> 3) & 1) * auVar680._12_4_;
              auVar641._16_4_ = (uint)((byte)(uVar429 >> 4) & 1) * auVar680._16_4_;
              auVar641._20_4_ = (uint)((byte)(uVar429 >> 5) & 1) * auVar680._20_4_;
              auVar641._24_4_ = (uint)((byte)(uVar429 >> 6) & 1) * auVar680._24_4_;
              auVar641._28_4_ = (uint)(byte)(uVar429 >> 7) * auVar680._28_4_;
              auVar680 = vaddps_avx512vl(auVar679,auVar637);
              bVar12 = (bool)((byte)uVar47 & 1);
              bVar14 = (bool)((byte)(uVar47 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar47 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar47 >> 3) & 1);
              bVar20 = (bool)((byte)(uVar47 >> 4) & 1);
              bVar22 = (bool)((byte)(uVar47 >> 5) & 1);
              bVar24 = (bool)((byte)(uVar47 >> 6) & 1);
              bVar26 = SUB81(uVar47 >> 7,0);
              bVar29 = (byte)uVar429 | (byte)uVar46;
              auVar683 = vorps_avx512vl(auVar641,auVar1005);
              auVar684 = vmovdqa32_avx512vl(auVar641);
              bVar15 = (bool)(bVar29 >> 1 & 1);
              bVar17 = (bool)(bVar29 >> 2 & 1);
              bVar19 = (bool)(bVar29 >> 3 & 1);
              bVar21 = (bool)(bVar29 >> 4 & 1);
              bVar23 = (bool)(bVar29 >> 5 & 1);
              bVar25 = (bool)(bVar29 >> 6 & 1);
              bVar13 = (bool)((byte)uVar431 & 1);
              auVar642._0_4_ =
                   (uint)bVar13 * ((uint)bVar12 * auVar680._0_4_ | (uint)!bVar12 * auVar679._0_4_) |
                   (uint)!bVar13 *
                   ((uint)(bVar29 & 1) * auVar684._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar683._0_4_
                   );
              bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
              auVar642._4_4_ =
                   (uint)bVar12 * ((uint)bVar14 * auVar680._4_4_ | (uint)!bVar14 * auVar679._4_4_) |
                   (uint)!bVar12 * ((uint)bVar15 * auVar684._4_4_ | (uint)!bVar15 * auVar683._4_4_);
              bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
              auVar642._8_4_ =
                   (uint)bVar12 * ((uint)bVar16 * auVar680._8_4_ | (uint)!bVar16 * auVar679._8_4_) |
                   (uint)!bVar12 * ((uint)bVar17 * auVar684._8_4_ | (uint)!bVar17 * auVar683._8_4_);
              bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
              auVar642._12_4_ =
                   (uint)bVar12 * ((uint)bVar18 * auVar680._12_4_ | (uint)!bVar18 * auVar679._12_4_)
                   | (uint)!bVar12 *
                     ((uint)bVar19 * auVar684._12_4_ | (uint)!bVar19 * auVar683._12_4_);
              bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
              auVar642._16_4_ =
                   (uint)bVar12 * ((uint)bVar20 * auVar680._16_4_ | (uint)!bVar20 * auVar679._16_4_)
                   | (uint)!bVar12 *
                     ((uint)bVar21 * auVar684._16_4_ | (uint)!bVar21 * auVar683._16_4_);
              bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
              auVar642._20_4_ =
                   (uint)bVar12 * ((uint)bVar22 * auVar680._20_4_ | (uint)!bVar22 * auVar679._20_4_)
                   | (uint)!bVar12 *
                     ((uint)bVar23 * auVar684._20_4_ | (uint)!bVar23 * auVar683._20_4_);
              bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
              auVar642._24_4_ =
                   (uint)bVar12 * ((uint)bVar24 * auVar680._24_4_ | (uint)!bVar24 * auVar679._24_4_)
                   | (uint)!bVar12 *
                     ((uint)bVar25 * auVar684._24_4_ | (uint)!bVar25 * auVar683._24_4_);
              bVar12 = SUB81(uVar431 >> 7,0);
              auVar642._28_4_ =
                   (uint)bVar12 * ((uint)bVar26 * auVar680._28_4_ | (uint)!bVar26 * auVar679._28_4_)
                   | (uint)!bVar12 *
                     ((uint)(bVar29 >> 7) * auVar684._28_4_ |
                     (uint)!(bool)(bVar29 >> 7) * auVar683._28_4_);
              in_ZMM19 = ZEXT3264(auVar642);
              *(undefined1 (*) [32])outptr = auVar642;
              ptr1 = ptr1 + 1;
              outptr = (float *)((long)outptr + 0x20);
              iVar426 = iVar426 + -1;
            } while (iVar426 != 0);
          }
        }
        if (iVar424 == 4) {
          auVar442 = *(undefined1 (*) [16])ptr;
          auVar932._16_16_ = auVar442;
          auVar932._0_16_ = auVar442;
          uVar427 = 0;
          if (3 < (int)uVar425) {
            auVar734 = vinserti64x4_avx512f(ZEXT3264(auVar932),auVar932,1);
            auVar716 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
            auVar725._8_4_ = 0x80000000;
            auVar725._0_8_ = 0x8000000080000000;
            auVar725._12_4_ = 0x80000000;
            auVar725._16_4_ = 0x80000000;
            auVar725._20_4_ = 0x80000000;
            auVar725._24_4_ = 0x80000000;
            auVar725._28_4_ = 0x80000000;
            auVar725._32_4_ = 0x80000000;
            auVar725._36_4_ = 0x80000000;
            auVar725._40_4_ = 0x80000000;
            auVar725._44_4_ = 0x80000000;
            auVar725._48_4_ = 0x80000000;
            auVar725._52_4_ = 0x80000000;
            auVar725._56_4_ = 0x80000000;
            auVar725._60_4_ = 0x80000000;
            auVar716 = vpternlogd_avx512f(auVar716,auVar734,auVar725,0xf8);
            auVar1774 = ZEXT1664(ZEXT816(0) << 0x40);
            uVar47 = vcmpps_avx512f(auVar716,auVar1774,1);
            auVar716 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar726._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar716._4_4_;
            auVar726._0_4_ = (uint)((byte)uVar47 & 1) * auVar716._0_4_;
            auVar726._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar716._8_4_;
            auVar726._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar716._12_4_;
            auVar726._16_4_ = (uint)((byte)(uVar47 >> 4) & 1) * auVar716._16_4_;
            auVar726._20_4_ = (uint)((byte)(uVar47 >> 5) & 1) * auVar716._20_4_;
            auVar726._24_4_ = (uint)((byte)(uVar47 >> 6) & 1) * auVar716._24_4_;
            auVar726._28_4_ = (uint)((byte)(uVar47 >> 7) & 1) * auVar716._28_4_;
            auVar726._32_4_ = (uint)((byte)(uVar47 >> 8) & 1) * auVar716._32_4_;
            auVar726._36_4_ = (uint)((byte)(uVar47 >> 9) & 1) * auVar716._36_4_;
            auVar726._40_4_ = (uint)((byte)(uVar47 >> 10) & 1) * auVar716._40_4_;
            auVar726._44_4_ = (uint)((byte)(uVar47 >> 0xb) & 1) * auVar716._44_4_;
            auVar726._48_4_ = (uint)((byte)(uVar47 >> 0xc) & 1) * auVar716._48_4_;
            auVar726._52_4_ = (uint)((byte)(uVar47 >> 0xd) & 1) * auVar716._52_4_;
            auVar726._56_4_ = (uint)((byte)(uVar47 >> 0xe) & 1) * auVar716._56_4_;
            auVar726._60_4_ = (uint)(byte)(uVar47 >> 0xf) * auVar716._60_4_;
            auVar716 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar717 = vdivps_avx512f(auVar716,auVar734);
            iVar424 = 3;
            uVar47 = vcmpps_avx512f(auVar734,auVar1774,1);
            uVar430 = vcmpps_avx512f(auVar734,auVar1774,4);
            auVar734 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar718 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar719 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            auVar720 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
            auVar721 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
            auVar722 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
            auVar723 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
            auVar724 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
            auVar725 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
            auVar727 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
            auVar728 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
            auVar729 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar730 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
            do {
              auVar460 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[2]));
              auVar461 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[3]));
              auVar519 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
              auVar472 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
              auVar674 = vinsertf32x4_avx512vl(ZEXT1632(auVar460),auVar461,1);
              auVar677 = vinsertf32x4_avx512vl(ZEXT1632(auVar519),auVar472,1);
              auVar737 = vinsertf64x4_avx512f(ZEXT3264(auVar677),auVar674,1);
              in_ZMM19 = vmulps_avx512f(auVar737,auVar717);
              uVar429 = vcmpps_avx512f(auVar737,auVar1774,1);
              auVar852 = vandps_avx512dq(in_ZMM19,auVar719);
              auVar336._8_4_ = 0xc0490fdb;
              auVar336._0_8_ = 0xc0490fdbc0490fdb;
              auVar336._12_4_ = 0xc0490fdb;
              auVar336._16_4_ = 0xc0490fdb;
              auVar336._20_4_ = 0xc0490fdb;
              auVar336._24_4_ = 0xc0490fdb;
              auVar336._28_4_ = 0xc0490fdb;
              auVar336._32_4_ = 0xc0490fdb;
              auVar336._36_4_ = 0xc0490fdb;
              auVar336._40_4_ = 0xc0490fdb;
              auVar336._44_4_ = 0xc0490fdb;
              auVar336._48_4_ = 0xc0490fdb;
              auVar336._52_4_ = 0xc0490fdb;
              auVar336._56_4_ = 0xc0490fdb;
              auVar336._60_4_ = 0xc0490fdb;
              auVar733 = vblendmps_avx512f(auVar718,auVar336);
              bVar12 = (bool)((byte)uVar429 & 1);
              in_ZMM21._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar472._0_4_;
              bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
              in_ZMM21._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar472._4_4_;
              bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
              in_ZMM21._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar472._8_4_;
              bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
              in_ZMM21._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar472._12_4_;
              in_ZMM21._16_4_ = (uint)((byte)(uVar429 >> 4) & 1) * auVar733._16_4_;
              in_ZMM21._20_4_ = (uint)((byte)(uVar429 >> 5) & 1) * auVar733._20_4_;
              in_ZMM21._24_4_ = (uint)((byte)(uVar429 >> 6) & 1) * auVar733._24_4_;
              in_ZMM21._28_4_ = (uint)((byte)(uVar429 >> 7) & 1) * auVar733._28_4_;
              in_ZMM21._32_4_ = (uint)((byte)(uVar429 >> 8) & 1) * auVar733._32_4_;
              in_ZMM21._36_4_ = (uint)((byte)(uVar429 >> 9) & 1) * auVar733._36_4_;
              in_ZMM21._40_4_ = (uint)((byte)(uVar429 >> 10) & 1) * auVar733._40_4_;
              in_ZMM21._44_4_ = (uint)((byte)(uVar429 >> 0xb) & 1) * auVar733._44_4_;
              in_ZMM21._48_4_ = (uint)((byte)(uVar429 >> 0xc) & 1) * auVar733._48_4_;
              in_ZMM21._52_4_ = (uint)((byte)(uVar429 >> 0xd) & 1) * auVar733._52_4_;
              in_ZMM21._56_4_ = (uint)((byte)(uVar429 >> 0xe) & 1) * auVar733._56_4_;
              in_ZMM21._60_4_ = (uint)(byte)(uVar429 >> 0xf) * auVar733._60_4_;
              uVar429 = vcmpps_avx512f(auVar716,auVar852,1);
              auVar337._8_4_ = 0xbf800000;
              auVar337._0_8_ = 0xbf800000bf800000;
              auVar337._12_4_ = 0xbf800000;
              auVar337._16_4_ = 0xbf800000;
              auVar337._20_4_ = 0xbf800000;
              auVar337._24_4_ = 0xbf800000;
              auVar337._28_4_ = 0xbf800000;
              auVar337._32_4_ = 0xbf800000;
              auVar337._36_4_ = 0xbf800000;
              auVar337._40_4_ = 0xbf800000;
              auVar337._44_4_ = 0xbf800000;
              auVar337._48_4_ = 0xbf800000;
              auVar337._52_4_ = 0xbf800000;
              auVar337._56_4_ = 0xbf800000;
              auVar337._60_4_ = 0xbf800000;
              auVar733 = vblendmps_avx512f(auVar852,auVar337);
              bVar12 = (bool)((byte)uVar429 & 1);
              auVar816._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * in_ZMM22._0_4_;
              bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
              auVar816._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
              bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
              auVar816._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
              bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
              auVar816._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
              bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
              auVar816._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * in_ZMM22._16_4_;
              bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
              auVar816._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * in_ZMM22._20_4_;
              bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
              auVar816._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * in_ZMM22._24_4_;
              bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
              auVar816._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * in_ZMM22._28_4_;
              bVar29 = (byte)(uVar429 >> 8);
              bVar12 = (bool)(bVar29 & 1);
              auVar816._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * in_ZMM22._32_4_;
              bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
              auVar816._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * in_ZMM22._36_4_;
              bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
              auVar816._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * in_ZMM22._40_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
              auVar816._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * in_ZMM22._44_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
              auVar816._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * in_ZMM22._48_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
              auVar816._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * in_ZMM22._52_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
              auVar816._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * in_ZMM22._56_4_;
              bVar12 = SUB81(uVar429 >> 0xf,0);
              auVar816._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * in_ZMM22._60_4_;
              auVar852 = vmaxps_avx512f(auVar852,auVar716);
              auVar852 = vdivps_avx512f(auVar816,auVar852);
              in_ZMM22 = vmulps_avx512f(auVar852,auVar852);
              auVar733 = vmulps_avx512f(in_ZMM22,in_ZMM22);
              auVar736 = vfmadd213ps_avx512f(auVar720,auVar733,auVar721);
              auVar736 = vfmadd213ps_avx512f(auVar736,auVar733,auVar722);
              auVar731 = vfmadd213ps_avx512f(auVar724,auVar733,auVar725);
              auVar731 = vfmadd213ps_avx512f(auVar731,auVar733,auVar727);
              auVar731 = vfmadd213ps_avx512f(auVar731,auVar733,auVar728);
              auVar736 = vfmadd213ps_avx512f(auVar736,auVar733,auVar723);
              auVar733 = vfmadd213ps_avx512f(auVar731,auVar733,auVar716);
              auVar733 = vfmadd231ps_avx512f(auVar733,in_ZMM22,auVar736);
              auVar852 = vmulps_avx512f(auVar733,auVar852);
              uVar431 = vcmpps_avx512f(auVar737,auVar1774,4);
              auVar733 = vaddps_avx512f(auVar852,auVar729);
              bVar12 = (bool)((byte)uVar429 & 1);
              auVar817._0_4_ = (uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar852._0_4_;
              bVar12 = (bool)((byte)(uVar429 >> 1) & 1);
              auVar817._4_4_ = (uint)bVar12 * auVar733._4_4_ | (uint)!bVar12 * auVar852._4_4_;
              bVar12 = (bool)((byte)(uVar429 >> 2) & 1);
              auVar817._8_4_ = (uint)bVar12 * auVar733._8_4_ | (uint)!bVar12 * auVar852._8_4_;
              bVar12 = (bool)((byte)(uVar429 >> 3) & 1);
              auVar817._12_4_ = (uint)bVar12 * auVar733._12_4_ | (uint)!bVar12 * auVar852._12_4_;
              bVar12 = (bool)((byte)(uVar429 >> 4) & 1);
              auVar817._16_4_ = (uint)bVar12 * auVar733._16_4_ | (uint)!bVar12 * auVar852._16_4_;
              bVar12 = (bool)((byte)(uVar429 >> 5) & 1);
              auVar817._20_4_ = (uint)bVar12 * auVar733._20_4_ | (uint)!bVar12 * auVar852._20_4_;
              bVar12 = (bool)((byte)(uVar429 >> 6) & 1);
              auVar817._24_4_ = (uint)bVar12 * auVar733._24_4_ | (uint)!bVar12 * auVar852._24_4_;
              bVar12 = (bool)((byte)(uVar429 >> 7) & 1);
              auVar817._28_4_ = (uint)bVar12 * auVar733._28_4_ | (uint)!bVar12 * auVar852._28_4_;
              bVar12 = (bool)(bVar29 & 1);
              auVar817._32_4_ = (uint)bVar12 * auVar733._32_4_ | (uint)!bVar12 * auVar852._32_4_;
              bVar12 = (bool)((byte)(uVar429 >> 9) & 1);
              auVar817._36_4_ = (uint)bVar12 * auVar733._36_4_ | (uint)!bVar12 * auVar852._36_4_;
              bVar12 = (bool)((byte)(uVar429 >> 10) & 1);
              auVar817._40_4_ = (uint)bVar12 * auVar733._40_4_ | (uint)!bVar12 * auVar852._40_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xb) & 1);
              auVar817._44_4_ = (uint)bVar12 * auVar733._44_4_ | (uint)!bVar12 * auVar852._44_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xc) & 1);
              auVar817._48_4_ = (uint)bVar12 * auVar733._48_4_ | (uint)!bVar12 * auVar852._48_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xd) & 1);
              auVar817._52_4_ = (uint)bVar12 * auVar733._52_4_ | (uint)!bVar12 * auVar852._52_4_;
              bVar12 = (bool)((byte)(uVar429 >> 0xe) & 1);
              auVar817._56_4_ = (uint)bVar12 * auVar733._56_4_ | (uint)!bVar12 * auVar852._56_4_;
              bVar12 = SUB81(uVar429 >> 0xf,0);
              auVar817._60_4_ = (uint)bVar12 * auVar733._60_4_ | (uint)!bVar12 * auVar852._60_4_;
              auVar852 = vpternlogd_avx512f(auVar817,in_ZMM19,auVar734,0xf8);
              auVar733 = vaddps_avx512f(auVar852,in_ZMM21);
              bVar12 = (bool)((byte)uVar47 & 1);
              bVar14 = (bool)((byte)(uVar47 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar47 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar47 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar47 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar47 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar47 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar47 >> 7) & 1);
              bVar21 = (bool)((byte)(uVar47 >> 8) & 1);
              bVar22 = (bool)((byte)(uVar47 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar47 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar47 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar47 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar47 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar47 >> 0xe) & 1);
              bVar28 = SUB81(uVar47 >> 0xf,0);
              auVar737 = vpternlogd_avx512f(auVar737,auVar734,auVar730,0xea);
              bVar13 = (bool)((byte)uVar430 & 1);
              auVar818._0_4_ =
                   (uint)bVar13 * ((uint)bVar12 * auVar733._0_4_ | (uint)!bVar12 * auVar852._0_4_) |
                   (uint)!bVar13 * auVar737._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar818._4_4_ =
                   (uint)bVar12 * ((uint)bVar14 * auVar733._4_4_ | (uint)!bVar14 * auVar852._4_4_) |
                   (uint)!bVar12 * auVar737._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar818._8_4_ =
                   (uint)bVar12 * ((uint)bVar15 * auVar733._8_4_ | (uint)!bVar15 * auVar852._8_4_) |
                   (uint)!bVar12 * auVar737._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar818._12_4_ =
                   (uint)bVar12 * ((uint)bVar16 * auVar733._12_4_ | (uint)!bVar16 * auVar852._12_4_)
                   | (uint)!bVar12 * auVar737._12_4_;
              bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
              auVar818._16_4_ =
                   (uint)bVar12 * ((uint)bVar17 * auVar733._16_4_ | (uint)!bVar17 * auVar852._16_4_)
                   | (uint)!bVar12 * auVar737._16_4_;
              bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
              auVar818._20_4_ =
                   (uint)bVar12 * ((uint)bVar18 * auVar733._20_4_ | (uint)!bVar18 * auVar852._20_4_)
                   | (uint)!bVar12 * auVar737._20_4_;
              bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
              auVar818._24_4_ =
                   (uint)bVar12 * ((uint)bVar19 * auVar733._24_4_ | (uint)!bVar19 * auVar852._24_4_)
                   | (uint)!bVar12 * auVar737._24_4_;
              bVar12 = (bool)((byte)(uVar430 >> 7) & 1);
              auVar818._28_4_ =
                   (uint)bVar12 * ((uint)bVar20 * auVar733._28_4_ | (uint)!bVar20 * auVar852._28_4_)
                   | (uint)!bVar12 * auVar737._28_4_;
              bVar12 = (bool)((byte)(uVar430 >> 8) & 1);
              auVar818._32_4_ =
                   (uint)bVar12 * ((uint)bVar21 * auVar733._32_4_ | (uint)!bVar21 * auVar852._32_4_)
                   | (uint)!bVar12 * auVar737._32_4_;
              bVar12 = (bool)((byte)(uVar430 >> 9) & 1);
              auVar818._36_4_ =
                   (uint)bVar12 * ((uint)bVar22 * auVar733._36_4_ | (uint)!bVar22 * auVar852._36_4_)
                   | (uint)!bVar12 * auVar737._36_4_;
              bVar12 = (bool)((byte)(uVar430 >> 10) & 1);
              auVar818._40_4_ =
                   (uint)bVar12 * ((uint)bVar23 * auVar733._40_4_ | (uint)!bVar23 * auVar852._40_4_)
                   | (uint)!bVar12 * auVar737._40_4_;
              bVar12 = (bool)((byte)(uVar430 >> 0xb) & 1);
              auVar818._44_4_ =
                   (uint)bVar12 * ((uint)bVar24 * auVar733._44_4_ | (uint)!bVar24 * auVar852._44_4_)
                   | (uint)!bVar12 * auVar737._44_4_;
              bVar12 = (bool)((byte)(uVar430 >> 0xc) & 1);
              auVar818._48_4_ =
                   (uint)bVar12 * ((uint)bVar25 * auVar733._48_4_ | (uint)!bVar25 * auVar852._48_4_)
                   | (uint)!bVar12 * auVar737._48_4_;
              bVar12 = (bool)((byte)(uVar430 >> 0xd) & 1);
              auVar818._52_4_ =
                   (uint)bVar12 * ((uint)bVar26 * auVar733._52_4_ | (uint)!bVar26 * auVar852._52_4_)
                   | (uint)!bVar12 * auVar737._52_4_;
              bVar12 = (bool)((byte)(uVar430 >> 0xe) & 1);
              auVar818._56_4_ =
                   (uint)bVar12 * ((uint)bVar27 * auVar733._56_4_ | (uint)!bVar27 * auVar852._56_4_)
                   | (uint)!bVar12 * auVar737._56_4_;
              bVar12 = SUB81(uVar430 >> 0xf,0);
              auVar818._60_4_ =
                   (uint)bVar12 * ((uint)bVar28 * auVar733._60_4_ | (uint)!bVar28 * auVar852._60_4_)
                   | (uint)!bVar12 * auVar737._60_4_;
              auVar737 = vblendmps_avx512f(auVar726,auVar818);
              bVar12 = (bool)((byte)uVar431 & 1);
              bVar13 = (bool)((byte)(uVar431 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar431 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar431 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar431 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar431 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar431 >> 6) & 1);
              bVar19 = (bool)((byte)(uVar431 >> 7) & 1);
              bVar20 = (bool)((byte)(uVar431 >> 8) & 1);
              bVar21 = (bool)((byte)(uVar431 >> 9) & 1);
              bVar22 = (bool)((byte)(uVar431 >> 10) & 1);
              bVar23 = (bool)((byte)(uVar431 >> 0xb) & 1);
              bVar24 = (bool)((byte)(uVar431 >> 0xc) & 1);
              bVar25 = (bool)((byte)(uVar431 >> 0xd) & 1);
              bVar26 = (bool)((byte)(uVar431 >> 0xe) & 1);
              bVar27 = SUB81(uVar431 >> 0xf,0);
              *(uint *)*(undefined1 (*) [32])outptr =
                   (uint)bVar12 * auVar737._0_4_ | !bVar12 * auVar818._0_4_;
              *(uint *)((long)*(undefined1 (*) [32])outptr + 4) =
                   (uint)bVar13 * auVar737._4_4_ | !bVar13 * auVar818._4_4_;
              *(uint *)((long)*(undefined1 (*) [32])outptr + 8) =
                   (uint)bVar14 * auVar737._8_4_ | !bVar14 * auVar818._8_4_;
              *(uint *)((long)*(undefined1 (*) [32])outptr + 0xc) =
                   (uint)bVar15 * auVar737._12_4_ | !bVar15 * auVar818._12_4_;
              *(uint *)((long)*(undefined1 (*) [32])outptr + 0x10) =
                   (uint)bVar16 * auVar737._16_4_ | !bVar16 * auVar818._16_4_;
              *(uint *)((long)*(undefined1 (*) [32])outptr + 0x14) =
                   (uint)bVar17 * auVar737._20_4_ | !bVar17 * auVar818._20_4_;
              *(uint *)((long)*(undefined1 (*) [32])outptr + 0x18) =
                   (uint)bVar18 * auVar737._24_4_ | !bVar18 * auVar818._24_4_;
              *(uint *)((long)*(undefined1 (*) [32])outptr + 0x1c) =
                   (uint)bVar19 * auVar737._28_4_ | !bVar19 * auVar818._28_4_;
              *(uint *)*(undefined1 (*) [32])((long)outptr + 0x20) =
                   (uint)bVar20 * auVar737._32_4_ | !bVar20 * auVar818._32_4_;
              *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 4) =
                   (uint)bVar21 * auVar737._36_4_ | !bVar21 * auVar818._36_4_;
              *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 8) =
                   (uint)bVar22 * auVar737._40_4_ | !bVar22 * auVar818._40_4_;
              *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0xc) =
                   (uint)bVar23 * auVar737._44_4_ | !bVar23 * auVar818._44_4_;
              *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x10) =
                   (uint)bVar24 * auVar737._48_4_ | !bVar24 * auVar818._48_4_;
              *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x14) =
                   (uint)bVar25 * auVar737._52_4_ | !bVar25 * auVar818._52_4_;
              *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x18) =
                   (uint)bVar26 * auVar737._56_4_ | !bVar26 * auVar818._56_4_;
              *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x1c) =
                   (uint)bVar27 * auVar737._60_4_ | !bVar27 * auVar818._60_4_;
              ptr1 = ptr1 + 4;
              outptr = (float *)((long)outptr + 0x40);
              iVar424 = iVar424 + 4;
            } while (iVar424 < (int)uVar425);
            uVar427 = uVar425 & 0x7ffffffc;
          }
          if ((int)(uVar427 | 1) < (int)uVar425) {
            auVar1006._8_4_ = 0x40490fdb;
            auVar1006._0_8_ = 0x40490fdb40490fdb;
            auVar1006._12_4_ = 0x40490fdb;
            auVar1006._16_4_ = 0x40490fdb;
            auVar1006._20_4_ = 0x40490fdb;
            auVar1006._24_4_ = 0x40490fdb;
            auVar1006._28_4_ = 0x40490fdb;
            auVar1264._8_4_ = 0x80000000;
            auVar1264._0_8_ = 0x8000000080000000;
            auVar1264._12_4_ = 0x80000000;
            auVar1264._16_4_ = 0x80000000;
            auVar1264._20_4_ = 0x80000000;
            auVar1264._24_4_ = 0x80000000;
            auVar1264._28_4_ = 0x80000000;
            auVar677 = vpternlogd_avx512vl(auVar1264,auVar932,auVar1006,0xea);
            auVar1066._8_4_ = 0x3f800000;
            auVar1066._0_8_ = 0x3f8000003f800000;
            auVar1066._12_4_ = 0x3f800000;
            auVar1066._16_4_ = 0x3f800000;
            auVar1066._20_4_ = 0x3f800000;
            auVar1066._24_4_ = 0x3f800000;
            auVar1066._28_4_ = 0x3f800000;
            auVar674 = vdivps_avx(auVar1066,auVar932);
            auVar460 = ZEXT816(0) << 0x40;
            uVar46 = vcmpps_avx512vl(ZEXT1632(auVar460),auVar677,2);
            uVar47 = vcmpps_avx512vl(auVar932,ZEXT1632(auVar460),1);
            auVar1265._8_4_ = 0x80000000;
            auVar1265._0_8_ = 0x8000000080000000;
            auVar1265._12_4_ = 0x80000000;
            auVar1265._16_4_ = 0x80000000;
            auVar1265._20_4_ = 0x80000000;
            auVar1265._24_4_ = 0x80000000;
            auVar1265._28_4_ = 0x80000000;
            auVar1325._8_4_ = 0x40490fdb;
            auVar1325._0_8_ = 0x40490fdb40490fdb;
            auVar1325._12_4_ = 0x40490fdb;
            auVar1325._16_4_ = 0x40490fdb;
            auVar1325._20_4_ = 0x40490fdb;
            auVar1325._24_4_ = 0x40490fdb;
            auVar1325._28_4_ = 0x40490fdb;
            auVar1383._8_4_ = 0x7fffffff;
            auVar1383._0_8_ = 0x7fffffff7fffffff;
            auVar1383._12_4_ = 0x7fffffff;
            auVar1383._16_4_ = 0x7fffffff;
            auVar1383._20_4_ = 0x7fffffff;
            auVar1383._24_4_ = 0x7fffffff;
            auVar1383._28_4_ = 0x7fffffff;
            auVar1439._8_4_ = 0xbc83a25c;
            auVar1439._0_8_ = 0xbc83a25cbc83a25c;
            auVar1439._12_4_ = 0xbc83a25c;
            auVar1439._16_4_ = 0xbc83a25c;
            auVar1439._20_4_ = 0xbc83a25c;
            auVar1439._24_4_ = 0xbc83a25c;
            auVar1439._28_4_ = 0xbc83a25c;
            auVar1493._8_4_ = 0xbd99b01e;
            auVar1493._0_8_ = 0xbd99b01ebd99b01e;
            auVar1493._12_4_ = 0xbd99b01e;
            auVar1493._16_4_ = 0xbd99b01e;
            auVar1493._20_4_ = 0xbd99b01e;
            auVar1493._24_4_ = 0xbd99b01e;
            auVar1493._28_4_ = 0xbd99b01e;
            auVar1547._8_4_ = 0xbe117200;
            auVar1547._0_8_ = 0xbe117200be117200;
            auVar1547._12_4_ = 0xbe117200;
            auVar1547._16_4_ = 0xbe117200;
            auVar1547._20_4_ = 0xbe117200;
            auVar1547._24_4_ = 0xbe117200;
            auVar1547._28_4_ = 0xbe117200;
            auVar1601._8_4_ = 0xbeaaaa53;
            auVar1601._0_8_ = 0xbeaaaa53beaaaa53;
            auVar1601._12_4_ = 0xbeaaaa53;
            auVar1601._16_4_ = 0xbeaaaa53;
            auVar1601._20_4_ = 0xbeaaaa53;
            auVar1601._24_4_ = 0xbeaaaa53;
            auVar1601._28_4_ = 0xbeaaaa53;
            auVar1655._8_4_ = 0x3b3ac537;
            auVar1655._0_8_ = 0x3b3ac5373b3ac537;
            auVar1655._12_4_ = 0x3b3ac537;
            auVar1655._16_4_ = 0x3b3ac537;
            auVar1655._20_4_ = 0x3b3ac537;
            auVar1655._24_4_ = 0x3b3ac537;
            auVar1655._28_4_ = 0x3b3ac537;
            auVar1709._8_4_ = 0x3d2edd4e;
            auVar1709._0_8_ = 0x3d2edd4e3d2edd4e;
            auVar1709._12_4_ = 0x3d2edd4e;
            auVar1709._16_4_ = 0x3d2edd4e;
            auVar1709._20_4_ = 0x3d2edd4e;
            auVar1709._24_4_ = 0x3d2edd4e;
            auVar1709._28_4_ = 0x3d2edd4e;
            auVar1760._8_4_ = 0x3dd9ed24;
            auVar1760._0_8_ = 0x3dd9ed243dd9ed24;
            auVar1760._12_4_ = 0x3dd9ed24;
            auVar1760._16_4_ = 0x3dd9ed24;
            auVar1760._20_4_ = 0x3dd9ed24;
            auVar1760._24_4_ = 0x3dd9ed24;
            auVar1760._28_4_ = 0x3dd9ed24;
            auVar1811._8_4_ = 0x3e4cb974;
            auVar1811._0_8_ = 0x3e4cb9743e4cb974;
            auVar1811._12_4_ = 0x3e4cb974;
            auVar1811._16_4_ = 0x3e4cb974;
            auVar1811._20_4_ = 0x3e4cb974;
            auVar1811._24_4_ = 0x3e4cb974;
            auVar1811._28_4_ = 0x3e4cb974;
            auVar677 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
            auVar678 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
            uVar882 = uVar427;
            do {
              auVar461 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
              auVar519 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
              auVar562 = vinsertf32x4_avx512vl(ZEXT1632(auVar461),auVar519,1);
              auVar679 = vmulps_avx512vl(auVar562,auVar674);
              auVar685 = ZEXT1632(auVar460);
              uVar430 = vcmpps_avx512vl(auVar562,auVar685,1);
              vandps_avx512vl(auVar679,auVar1383);
              auVar181._8_4_ = 0xc0490fdb;
              auVar181._0_8_ = 0xc0490fdbc0490fdb;
              auVar181._12_4_ = 0xc0490fdb;
              auVar181._16_4_ = 0xc0490fdb;
              auVar181._20_4_ = 0xc0490fdb;
              auVar181._24_4_ = 0xc0490fdb;
              auVar181._28_4_ = 0xc0490fdb;
              auVar680 = vblendmps_avx512vl(auVar1325,auVar181);
              bVar12 = (bool)((byte)uVar430 & 1);
              auVar643._0_4_ = (uint)bVar12 * auVar680._0_4_ | (uint)!bVar12 * in_ZMM21._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar643._4_4_ = (uint)bVar12 * auVar680._4_4_ | (uint)!bVar12 * in_ZMM21._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar643._8_4_ = (uint)bVar12 * auVar680._8_4_ | (uint)!bVar12 * in_ZMM21._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar643._12_4_ = (uint)bVar12 * auVar680._12_4_ | (uint)!bVar12 * in_ZMM21._12_4_;
              bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
              auVar643._16_4_ = (uint)bVar12 * auVar680._16_4_ | (uint)!bVar12 * in_ZMM21._16_4_;
              bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
              auVar643._20_4_ = (uint)bVar12 * auVar680._20_4_ | (uint)!bVar12 * in_ZMM21._20_4_;
              bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
              auVar643._24_4_ = (uint)bVar12 * auVar680._24_4_ | (uint)!bVar12 * in_ZMM21._24_4_;
              bVar12 = SUB81(uVar430 >> 7,0);
              auVar643._28_4_ = (uint)bVar12 * auVar680._28_4_ | (uint)!bVar12 * in_ZMM21._28_4_;
              in_ZMM21 = ZEXT3264(auVar643);
              uVar430 = vcmpps_avx512vl(auVar1066,auVar679,1);
              auVar182._8_4_ = 0xbf800000;
              auVar182._0_8_ = 0xbf800000bf800000;
              auVar182._12_4_ = 0xbf800000;
              auVar182._16_4_ = 0xbf800000;
              auVar182._20_4_ = 0xbf800000;
              auVar182._24_4_ = 0xbf800000;
              auVar182._28_4_ = 0xbf800000;
              auVar680 = vblendmps_avx512vl(auVar679,auVar182);
              bVar29 = (byte)uVar430;
              auVar644._0_4_ =
                   (uint)(bVar29 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM22._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar644._4_4_ = (uint)bVar12 * auVar680._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar644._8_4_ = (uint)bVar12 * auVar680._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar644._12_4_ = (uint)bVar12 * auVar680._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
              bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
              auVar644._16_4_ = (uint)bVar12 * auVar680._16_4_ | (uint)!bVar12 * in_ZMM22._16_4_;
              bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
              auVar644._20_4_ = (uint)bVar12 * auVar680._20_4_ | (uint)!bVar12 * in_ZMM22._20_4_;
              bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
              auVar644._24_4_ = (uint)bVar12 * auVar680._24_4_ | (uint)!bVar12 * in_ZMM22._24_4_;
              bVar12 = SUB81(uVar430 >> 7,0);
              auVar644._28_4_ = (uint)bVar12 * auVar680._28_4_ | (uint)!bVar12 * in_ZMM22._28_4_;
              auVar680 = vdivps_avx512vl(auVar644,auVar679);
              auVar645._0_4_ =
                   (uint)(bVar29 & 1) * auVar680._0_4_ | !(bool)(bVar29 & 1) * auVar644._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar645._4_4_ = (uint)bVar12 * auVar680._4_4_ | !bVar12 * auVar644._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar645._8_4_ = (uint)bVar12 * auVar680._8_4_ | !bVar12 * auVar644._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar645._12_4_ = (uint)bVar12 * auVar680._12_4_ | !bVar12 * auVar644._12_4_;
              bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
              auVar645._16_4_ = (uint)bVar12 * auVar680._16_4_ | !bVar12 * auVar644._16_4_;
              bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
              auVar645._20_4_ = (uint)bVar12 * auVar680._20_4_ | !bVar12 * auVar644._20_4_;
              bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
              auVar645._24_4_ = (uint)bVar12 * auVar680._24_4_ | !bVar12 * auVar644._24_4_;
              bVar12 = SUB81(uVar430 >> 7,0);
              auVar645._28_4_ = (uint)bVar12 * auVar680._28_4_ | !bVar12 * auVar644._28_4_;
              in_ZMM22 = ZEXT3264(auVar645);
              uVar429 = vcmpps_avx512vl(auVar562,auVar685,4);
              auVar680 = vmulps_avx512vl(auVar645,auVar645);
              vandps_avx512vl(auVar562,auVar1265);
              auVar562 = vmulps_avx512vl(auVar680,auVar680);
              auVar683 = vfmadd213ps_avx512vl(auVar1439,auVar562,auVar1493);
              auVar683 = vfmadd213ps_avx512vl(auVar683,auVar562,auVar1547);
              auVar684 = vfmadd213ps_avx512vl(auVar1655,auVar562,auVar1709);
              auVar684 = vfmadd213ps_avx512vl(auVar684,auVar562,auVar1760);
              auVar683 = vfmadd213ps_avx512vl(auVar683,auVar562,auVar1601);
              auVar684 = vfmadd213ps_avx512vl(auVar684,auVar562,auVar1811);
              auVar562 = vfmadd213ps_avx512vl(auVar684,auVar562,auVar1066);
              auVar562 = vfmadd231ps_avx512vl(auVar562,auVar680,auVar683);
              uVar431 = vcmpps_avx512vl(auVar932,auVar685,4);
              uVar431 = uVar429 & uVar431;
              auVar562 = vmulps_avx512vl(auVar562,auVar645);
              auVar683 = vaddps_avx512vl(auVar562,auVar677);
              auVar646._0_4_ =
                   (uint)(bVar29 & 1) * auVar683._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar562._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar646._4_4_ = (uint)bVar12 * auVar683._4_4_ | (uint)!bVar12 * auVar562._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar646._8_4_ = (uint)bVar12 * auVar683._8_4_ | (uint)!bVar12 * auVar562._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar646._12_4_ = (uint)bVar12 * auVar683._12_4_ | (uint)!bVar12 * auVar562._12_4_;
              bVar12 = (bool)((byte)(uVar430 >> 4) & 1);
              auVar646._16_4_ = (uint)bVar12 * auVar683._16_4_ | (uint)!bVar12 * auVar562._16_4_;
              bVar12 = (bool)((byte)(uVar430 >> 5) & 1);
              auVar646._20_4_ = (uint)bVar12 * auVar683._20_4_ | (uint)!bVar12 * auVar562._20_4_;
              bVar12 = (bool)((byte)(uVar430 >> 6) & 1);
              auVar646._24_4_ = (uint)bVar12 * auVar683._24_4_ | (uint)!bVar12 * auVar562._24_4_;
              bVar12 = SUB81(uVar430 >> 7,0);
              auVar646._28_4_ = (uint)bVar12 * auVar683._28_4_ | (uint)!bVar12 * auVar562._28_4_;
              auVar562 = vpternlogd_avx512vl(auVar646,auVar679,auVar1265,0xf8);
              auVar679 = vaddps_avx512vl(auVar562,auVar643);
              bVar12 = (bool)((byte)uVar47 & 1);
              bVar14 = (bool)((byte)(uVar47 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar47 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar47 >> 3) & 1);
              bVar20 = (bool)((byte)(uVar47 >> 4) & 1);
              bVar22 = (bool)((byte)(uVar47 >> 5) & 1);
              bVar24 = (bool)((byte)(uVar47 >> 6) & 1);
              bVar26 = SUB81(uVar47 >> 7,0);
              auVar680 = vorps_avx512vl(auVar680,auVar678);
              auVar647._4_4_ = (uint)((byte)(uVar429 >> 1) & 1) * auVar680._4_4_;
              auVar647._0_4_ = (uint)((byte)uVar429 & 1) * auVar680._0_4_;
              auVar647._8_4_ = (uint)((byte)(uVar429 >> 2) & 1) * auVar680._8_4_;
              auVar647._12_4_ = (uint)((byte)(uVar429 >> 3) & 1) * auVar680._12_4_;
              auVar647._16_4_ = (uint)((byte)(uVar429 >> 4) & 1) * auVar680._16_4_;
              auVar647._20_4_ = (uint)((byte)(uVar429 >> 5) & 1) * auVar680._20_4_;
              auVar647._24_4_ = (uint)((byte)(uVar429 >> 6) & 1) * auVar680._24_4_;
              auVar647._28_4_ = (uint)(byte)(uVar429 >> 7) * auVar680._28_4_;
              bVar29 = (byte)uVar429 | (byte)uVar46;
              auVar680 = vorps_avx512vl(auVar647,auVar1006);
              auVar683 = vmovdqa32_avx512vl(auVar647);
              bVar15 = (bool)(bVar29 >> 1 & 1);
              bVar17 = (bool)(bVar29 >> 2 & 1);
              bVar19 = (bool)(bVar29 >> 3 & 1);
              bVar21 = (bool)(bVar29 >> 4 & 1);
              bVar23 = (bool)(bVar29 >> 5 & 1);
              bVar25 = (bool)(bVar29 >> 6 & 1);
              bVar13 = (bool)((byte)uVar431 & 1);
              auVar648._0_4_ =
                   (uint)bVar13 * ((uint)bVar12 * auVar679._0_4_ | (uint)!bVar12 * auVar562._0_4_) |
                   (uint)!bVar13 *
                   ((uint)(bVar29 & 1) * auVar683._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar680._0_4_
                   );
              bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
              auVar648._4_4_ =
                   (uint)bVar12 * ((uint)bVar14 * auVar679._4_4_ | (uint)!bVar14 * auVar562._4_4_) |
                   (uint)!bVar12 * ((uint)bVar15 * auVar683._4_4_ | (uint)!bVar15 * auVar680._4_4_);
              bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
              auVar648._8_4_ =
                   (uint)bVar12 * ((uint)bVar16 * auVar679._8_4_ | (uint)!bVar16 * auVar562._8_4_) |
                   (uint)!bVar12 * ((uint)bVar17 * auVar683._8_4_ | (uint)!bVar17 * auVar680._8_4_);
              bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
              auVar648._12_4_ =
                   (uint)bVar12 * ((uint)bVar18 * auVar679._12_4_ | (uint)!bVar18 * auVar562._12_4_)
                   | (uint)!bVar12 *
                     ((uint)bVar19 * auVar683._12_4_ | (uint)!bVar19 * auVar680._12_4_);
              bVar12 = (bool)((byte)(uVar431 >> 4) & 1);
              auVar648._16_4_ =
                   (uint)bVar12 * ((uint)bVar20 * auVar679._16_4_ | (uint)!bVar20 * auVar562._16_4_)
                   | (uint)!bVar12 *
                     ((uint)bVar21 * auVar683._16_4_ | (uint)!bVar21 * auVar680._16_4_);
              bVar12 = (bool)((byte)(uVar431 >> 5) & 1);
              auVar648._20_4_ =
                   (uint)bVar12 * ((uint)bVar22 * auVar679._20_4_ | (uint)!bVar22 * auVar562._20_4_)
                   | (uint)!bVar12 *
                     ((uint)bVar23 * auVar683._20_4_ | (uint)!bVar23 * auVar680._20_4_);
              bVar12 = (bool)((byte)(uVar431 >> 6) & 1);
              auVar648._24_4_ =
                   (uint)bVar12 * ((uint)bVar24 * auVar679._24_4_ | (uint)!bVar24 * auVar562._24_4_)
                   | (uint)!bVar12 *
                     ((uint)bVar25 * auVar683._24_4_ | (uint)!bVar25 * auVar680._24_4_);
              bVar12 = SUB81(uVar431 >> 7,0);
              auVar648._28_4_ =
                   (uint)bVar12 * ((uint)bVar26 * auVar679._28_4_ | (uint)!bVar26 * auVar562._28_4_)
                   | (uint)!bVar12 *
                     ((uint)(bVar29 >> 7) * auVar683._28_4_ |
                     (uint)!(bool)(bVar29 >> 7) * auVar680._28_4_);
              in_ZMM19 = ZEXT3264(auVar648);
              *(undefined1 (*) [32])outptr = auVar648;
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)outptr + 0x20);
              uVar427 = uVar882 + 2;
              iVar424 = uVar882 + 3;
              uVar882 = uVar427;
            } while (iVar424 < (int)uVar425);
          }
          if ((int)uVar427 < (int)uVar425) {
            auVar975._8_4_ = 0x40490fdb;
            auVar975._0_8_ = 0x40490fdb40490fdb;
            auVar975._12_4_ = 0x40490fdb;
            auVar1238._8_4_ = 0x80000000;
            auVar1238._0_8_ = 0x8000000080000000;
            auVar1238._12_4_ = 0x80000000;
            auVar1051._8_4_ = 0x3f800000;
            auVar1051._0_8_ = 0x3f8000003f800000;
            auVar1051._12_4_ = 0x3f800000;
            auVar461 = vpternlogd_avx512vl(auVar1238,auVar442,auVar975,0xea);
            auVar460 = vdivps_avx(auVar1051,auVar442);
            lVar428 = 0;
            auVar472 = ZEXT816(0) << 0x40;
            uVar46 = vcmpps_avx512vl(auVar472,auVar461,2);
            uVar47 = vcmpps_avx512vl(auVar442,auVar472,1);
            auVar1239._8_4_ = 0x80000000;
            auVar1239._0_8_ = 0x8000000080000000;
            auVar1239._12_4_ = 0x80000000;
            auVar1304._8_4_ = 0x40490fdb;
            auVar1304._0_8_ = 0x40490fdb40490fdb;
            auVar1304._12_4_ = 0x40490fdb;
            auVar1363._8_4_ = 0x7fffffff;
            auVar1363._0_8_ = 0x7fffffff7fffffff;
            auVar1363._12_4_ = 0x7fffffff;
            auVar1419._8_4_ = 0xbc83a25c;
            auVar1419._0_8_ = 0xbc83a25cbc83a25c;
            auVar1419._12_4_ = 0xbc83a25c;
            auVar1473._8_4_ = 0xbd99b01e;
            auVar1473._0_8_ = 0xbd99b01ebd99b01e;
            auVar1473._12_4_ = 0xbd99b01e;
            auVar1527._8_4_ = 0xbe117200;
            auVar1527._0_8_ = 0xbe117200be117200;
            auVar1527._12_4_ = 0xbe117200;
            auVar1581._8_4_ = 0xbeaaaa53;
            auVar1581._0_8_ = 0xbeaaaa53beaaaa53;
            auVar1581._12_4_ = 0xbeaaaa53;
            auVar1635._8_4_ = 0x3b3ac537;
            auVar1635._0_8_ = 0x3b3ac5373b3ac537;
            auVar1635._12_4_ = 0x3b3ac537;
            auVar1689._8_4_ = 0x3d2edd4e;
            auVar1689._0_8_ = 0x3d2edd4e3d2edd4e;
            auVar1689._12_4_ = 0x3d2edd4e;
            auVar1743._8_4_ = 0x3dd9ed24;
            auVar1743._0_8_ = 0x3dd9ed243dd9ed24;
            auVar1743._12_4_ = 0x3dd9ed24;
            auVar1793._8_4_ = 0x3e4cb974;
            auVar1793._0_8_ = 0x3e4cb9743e4cb974;
            auVar1793._12_4_ = 0x3e4cb974;
            auVar461 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
            auVar519 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
            do {
              auVar464 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[lVar428]));
              uVar430 = vcmpps_avx512vl(auVar464,auVar472,1);
              auVar57._8_4_ = 0xc0490fdb;
              auVar57._0_8_ = 0xc0490fdbc0490fdb;
              auVar57._12_4_ = 0xc0490fdb;
              auVar465 = vblendmps_avx512vl(auVar1304,auVar57);
              bVar12 = (bool)((byte)uVar430 & 1);
              auVar537._0_4_ = (uint)bVar12 * auVar465._0_4_ | (uint)!bVar12 * in_ZMM19._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar537._4_4_ = (uint)bVar12 * auVar465._4_4_ | (uint)!bVar12 * in_ZMM19._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar537._8_4_ = (uint)bVar12 * auVar465._8_4_ | (uint)!bVar12 * in_ZMM19._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar537._12_4_ = (uint)bVar12 * auVar465._12_4_ | (uint)!bVar12 * in_ZMM19._12_4_;
              auVar465 = vmulps_avx512vl(auVar464,auVar460);
              auVar466 = vandps_avx512vl(auVar465,auVar1363);
              uVar430 = vcmpps_avx512vl(auVar1051,auVar466,1);
              auVar58._8_4_ = 0xbf800000;
              auVar58._0_8_ = 0xbf800000bf800000;
              auVar58._12_4_ = 0xbf800000;
              auVar469 = vblendmps_avx512vl(auVar466,auVar58);
              bVar29 = (byte)uVar430;
              auVar538._0_4_ =
                   (uint)(bVar29 & 1) * auVar469._0_4_ | (uint)!(bool)(bVar29 & 1) * in_ZMM22._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar538._4_4_ = (uint)bVar12 * auVar469._4_4_ | (uint)!bVar12 * in_ZMM22._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar538._8_4_ = (uint)bVar12 * auVar469._8_4_ | (uint)!bVar12 * in_ZMM22._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar538._12_4_ = (uint)bVar12 * auVar469._12_4_ | (uint)!bVar12 * in_ZMM22._12_4_;
              uVar429 = vcmpps_avx512vl(auVar464,auVar472,4);
              auVar466 = vdivps_avx512vl(auVar538,auVar466);
              auVar539._0_4_ =
                   (uint)(bVar29 & 1) * auVar466._0_4_ | !(bool)(bVar29 & 1) * auVar538._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar539._4_4_ = (uint)bVar12 * auVar466._4_4_ | !bVar12 * auVar538._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar539._8_4_ = (uint)bVar12 * auVar466._8_4_ | !bVar12 * auVar538._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar539._12_4_ = (uint)bVar12 * auVar466._12_4_ | !bVar12 * auVar538._12_4_;
              in_ZMM22 = ZEXT1664(auVar539);
              auVar466 = vmulps_avx512vl(auVar539,auVar539);
              auVar469 = vmulps_avx512vl(auVar466,auVar466);
              auVar464 = vandps_avx512vl(auVar464,auVar1239);
              auVar470 = vfmadd213ps_avx512vl(auVar1419,auVar469,auVar1473);
              auVar470 = vfmadd213ps_avx512vl(auVar470,auVar469,auVar1527);
              auVar523 = vfmadd213ps_avx512vl(auVar1635,auVar469,auVar1689);
              auVar523 = vfmadd213ps_avx512vl(auVar523,auVar469,auVar1743);
              auVar523 = vfmadd213ps_avx512vl(auVar523,auVar469,auVar1793);
              auVar470 = vfmadd213ps_avx512vl(auVar470,auVar469,auVar1581);
              auVar469 = vfmadd213ps_avx512vl(auVar523,auVar469,auVar1051);
              auVar466 = vfmadd231ps_avx512vl(auVar469,auVar466,auVar470);
              auVar466 = vmulps_avx512vl(auVar466,auVar539);
              uVar431 = vcmpps_avx512vl(auVar442,auVar472,4);
              uVar431 = uVar429 & uVar431;
              auVar469 = vaddps_avx512vl(auVar466,auVar461);
              auVar540._0_4_ =
                   (uint)(bVar29 & 1) * auVar469._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar466._0_4_;
              bVar12 = (bool)((byte)(uVar430 >> 1) & 1);
              auVar540._4_4_ = (uint)bVar12 * auVar469._4_4_ | (uint)!bVar12 * auVar466._4_4_;
              bVar12 = (bool)((byte)(uVar430 >> 2) & 1);
              auVar540._8_4_ = (uint)bVar12 * auVar469._8_4_ | (uint)!bVar12 * auVar466._8_4_;
              bVar12 = (bool)((byte)(uVar430 >> 3) & 1);
              auVar540._12_4_ = (uint)bVar12 * auVar469._12_4_ | (uint)!bVar12 * auVar466._12_4_;
              auVar465 = vpternlogd_avx512vl(auVar540,auVar465,auVar1239,0xf8);
              auVar464 = vorps_avx512vl(auVar464,auVar519);
              auVar541._4_4_ = (uint)((byte)(uVar429 >> 1) & 1) * auVar464._4_4_;
              auVar541._0_4_ = (uint)((byte)uVar429 & 1) * auVar464._0_4_;
              auVar541._8_4_ = (uint)((byte)(uVar429 >> 2) & 1) * auVar464._8_4_;
              auVar541._12_4_ = (uint)((byte)(uVar429 >> 3) & 1) * auVar464._12_4_;
              auVar464 = vaddps_avx512vl(auVar465,auVar537);
              bVar12 = (bool)((byte)uVar47 & 1);
              bVar15 = (bool)((byte)(uVar47 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar47 >> 2) & 1);
              bVar19 = (bool)((byte)(uVar47 >> 3) & 1);
              uVar48 = (ushort)uVar429 | (ushort)uVar46;
              auVar466 = vorps_avx512vl(auVar541,auVar975);
              auVar469 = vmovdqa32_avx512vl(auVar541);
              bVar13 = (bool)((byte)uVar48 & 1);
              bVar16 = (bool)((byte)(uVar48 >> 1) & 1);
              bVar18 = (bool)((byte)(uVar48 >> 2) & 1);
              bVar20 = (bool)((byte)(uVar48 >> 3) & 1);
              bVar14 = (bool)((byte)uVar431 & 1);
              auVar542._0_4_ =
                   (uint)bVar14 * ((uint)bVar12 * auVar464._0_4_ | (uint)!bVar12 * auVar465._0_4_) |
                   (uint)!bVar14 * ((uint)bVar13 * auVar469._0_4_ | (uint)!bVar13 * auVar466._0_4_);
              bVar12 = (bool)((byte)(uVar431 >> 1) & 1);
              auVar542._4_4_ =
                   (uint)bVar12 * ((uint)bVar15 * auVar464._4_4_ | (uint)!bVar15 * auVar465._4_4_) |
                   (uint)!bVar12 * ((uint)bVar16 * auVar469._4_4_ | (uint)!bVar16 * auVar466._4_4_);
              bVar12 = (bool)((byte)(uVar431 >> 2) & 1);
              auVar542._8_4_ =
                   (uint)bVar12 * ((uint)bVar17 * auVar464._8_4_ | (uint)!bVar17 * auVar465._8_4_) |
                   (uint)!bVar12 * ((uint)bVar18 * auVar469._8_4_ | (uint)!bVar18 * auVar466._8_4_);
              bVar12 = (bool)((byte)(uVar431 >> 3) & 1);
              auVar542._12_4_ =
                   (uint)bVar12 * ((uint)bVar19 * auVar464._12_4_ | (uint)!bVar19 * auVar465._12_4_)
                   | (uint)!bVar12 *
                     ((uint)bVar20 * auVar469._12_4_ | (uint)!bVar20 * auVar466._12_4_);
              in_ZMM19 = ZEXT1664(auVar542);
              *(undefined1 (*) [16])*(undefined1 (*) [32])outptr = auVar542;
              outptr = (float *)((long)*(undefined1 (*) [32])outptr + 0x10);
              lVar428 = lVar428 + 1;
            } while (uVar425 - uVar427 != (int)lVar428);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void binary_op_vector(const float* ptr, const float* ptr1, float* outptr, int aw, int bw, int ap, int bp, int op_type)
{
    using namespace BinaryOp_x86_fma_functor;

    if (op_type == BinaryOp::Operation_ADD) return binary_op_vector<binary_op_add>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_SUB) return binary_op_vector<binary_op_sub>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_MUL) return binary_op_vector<binary_op_mul>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_DIV) return binary_op_vector<binary_op_div>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_MAX) return binary_op_vector<binary_op_max>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_MIN) return binary_op_vector<binary_op_min>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_POW) return binary_op_vector<binary_op_pow>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_RSUB) return binary_op_vector<binary_op_rsub>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_RDIV) return binary_op_vector<binary_op_rdiv>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_RPOW) return binary_op_vector<binary_op_rpow>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_ATAN2) return binary_op_vector<binary_op_atan2>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_RATAN2) return binary_op_vector<binary_op_ratan2>(ptr, ptr1, outptr, aw, bw, ap, bp);

    // should never reach here
}